

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

void ncnn::binary_op_vector
               (float *ptr,float *ptr1,float *outptr,int aw,int bw,int ap,int bp,int op_type)

{
  int iVar1;
  int iVar7;
  float *pfVar9;
  uint *puVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  ulong uVar33;
  ushort uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  __m512 y;
  __m512 y_00;
  __m512 y_01;
  __m512 y_02;
  __m512 y_03;
  __m512 y_04;
  __m512 y_05;
  __m512 y_06;
  __m512 y_07;
  __m512 y_08;
  __m512 y_09;
  __m512 y_10;
  __m512 y_11;
  __m512 y_12;
  __m512 y_13;
  __m512 y_14;
  __m512 y_15;
  __m512 y_16;
  __m512 y_17;
  __m512 y_18;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [16];
  __m512 x;
  __m512 x_00;
  __m512 x_01;
  __m512 x_02;
  __m512 x_03;
  __m512 x_04;
  __m512 x_05;
  __m512 x_06;
  __m512 x_07;
  __m512 x_08;
  __m512 x_09;
  __m512 x_10;
  __m512 x_11;
  __m512 x_12;
  __m512 x_13;
  __m512 x_14;
  __m512 x_15;
  __m512 x_16;
  __m512 x_17;
  __m512 x_18;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float afVar254 [16];
  float afVar255 [16];
  float afVar256 [16];
  float afVar257 [16];
  float afVar258 [16];
  float afVar259 [16];
  float afVar260 [16];
  float afVar261 [16];
  float afVar262 [16];
  float afVar263 [16];
  int aiVar264 [16];
  float afVar265 [16];
  float afVar266 [16];
  float afVar267 [16];
  float afVar268 [16];
  float afVar269 [16];
  float afVar270 [16];
  float afVar271 [16];
  float afVar272 [16];
  float afVar273 [16];
  float afVar274 [16];
  float afVar275 [16];
  int iVar276;
  int iVar277;
  __m512 *__return_storage_ptr__;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar287 [16];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  int iVar278;
  ulong uVar279;
  long lVar280;
  bool bVar281;
  ulong uVar282;
  ulong uVar283;
  ulong uVar284;
  ulong uVar285;
  uint uVar286;
  undefined1 auVar550 [32];
  undefined1 auVar551 [32];
  undefined1 auVar552 [32];
  undefined1 auVar553 [32];
  undefined1 auVar554 [32];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar555 [32];
  undefined1 auVar556 [32];
  undefined1 auVar557 [32];
  undefined1 auVar558 [32];
  undefined1 auVar559 [32];
  undefined1 auVar560 [32];
  undefined1 auVar561 [32];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar562 [32];
  undefined1 auVar563 [32];
  undefined1 auVar564 [32];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar565 [32];
  undefined1 auVar566 [32];
  undefined1 auVar567 [32];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar568 [32];
  undefined1 auVar569 [32];
  undefined1 auVar570 [32];
  undefined1 auVar571 [32];
  undefined1 auVar572 [32];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  uint uVar659;
  uint uVar660;
  uint uVar662;
  uint uVar663;
  uint uVar664;
  undefined1 auVar573 [64];
  undefined1 auVar574 [64];
  undefined1 auVar575 [64];
  undefined1 auVar576 [64];
  undefined1 auVar577 [64];
  undefined1 auVar578 [64];
  undefined1 auVar579 [64];
  undefined1 auVar580 [64];
  undefined1 auVar581 [64];
  undefined1 auVar582 [64];
  undefined1 auVar583 [64];
  undefined1 auVar584 [64];
  undefined1 auVar585 [64];
  undefined1 auVar586 [64];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar587 [64];
  undefined1 auVar588 [64];
  undefined1 auVar589 [64];
  undefined1 auVar590 [64];
  undefined1 auVar591 [64];
  undefined1 auVar592 [64];
  undefined1 auVar593 [64];
  undefined1 auVar594 [64];
  undefined1 auVar595 [64];
  undefined1 auVar596 [64];
  undefined1 auVar597 [64];
  undefined1 auVar598 [64];
  undefined1 auVar599 [64];
  undefined1 auVar600 [64];
  undefined1 auVar601 [64];
  undefined1 auVar602 [64];
  undefined1 auVar603 [64];
  undefined1 auVar604 [64];
  undefined1 auVar605 [64];
  undefined1 auVar606 [64];
  undefined1 auVar607 [64];
  undefined1 auVar608 [64];
  undefined1 auVar609 [64];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar610 [64];
  undefined1 auVar611 [64];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar612 [64];
  undefined1 auVar613 [64];
  undefined1 auVar614 [64];
  undefined1 auVar615 [64];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar616 [64];
  undefined1 auVar617 [64];
  undefined1 auVar618 [64];
  undefined1 auVar619 [64];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  undefined1 auVar470 [32];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar620 [64];
  undefined1 auVar621 [64];
  undefined1 auVar622 [64];
  undefined1 auVar623 [64];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar476 [32];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  uint uVar661;
  uint uVar665;
  undefined1 auVar487 [32];
  undefined1 auVar488 [32];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar489 [32];
  undefined1 auVar490 [32];
  undefined1 auVar491 [32];
  undefined1 auVar492 [32];
  undefined1 auVar493 [32];
  undefined1 auVar494 [32];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar624 [64];
  undefined1 auVar625 [64];
  undefined1 auVar626 [64];
  undefined1 auVar627 [64];
  undefined1 auVar628 [64];
  undefined1 auVar629 [64];
  undefined1 auVar630 [64];
  undefined1 auVar631 [64];
  undefined1 auVar632 [64];
  undefined1 auVar496 [32];
  undefined1 auVar497 [32];
  undefined1 auVar498 [32];
  undefined1 auVar500 [32];
  undefined1 auVar501 [32];
  undefined1 auVar502 [32];
  undefined1 auVar503 [32];
  undefined1 auVar504 [32];
  undefined1 auVar505 [32];
  undefined1 auVar350 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar633 [64];
  undefined1 auVar634 [64];
  undefined1 auVar635 [64];
  undefined1 auVar636 [64];
  undefined1 auVar506 [32];
  undefined1 auVar507 [32];
  undefined1 auVar508 [32];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar637 [64];
  undefined1 auVar638 [64];
  undefined1 auVar639 [64];
  undefined1 auVar640 [64];
  undefined1 auVar509 [32];
  undefined1 auVar510 [32];
  undefined1 auVar511 [32];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar512 [32];
  undefined1 auVar513 [32];
  undefined1 auVar514 [32];
  undefined1 auVar515 [32];
  undefined1 auVar516 [32];
  undefined1 auVar517 [32];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar518 [32];
  undefined1 auVar519 [32];
  undefined1 auVar520 [32];
  undefined1 auVar521 [32];
  undefined1 auVar522 [32];
  undefined1 auVar523 [32];
  undefined1 auVar524 [32];
  undefined1 auVar525 [32];
  undefined1 auVar526 [32];
  undefined1 auVar527 [32];
  undefined1 auVar528 [32];
  undefined1 auVar529 [32];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar530 [32];
  undefined1 auVar531 [32];
  undefined1 auVar532 [32];
  undefined1 auVar641 [64];
  undefined1 auVar642 [64];
  undefined1 auVar643 [64];
  undefined1 auVar644 [64];
  undefined1 auVar645 [64];
  undefined1 auVar533 [32];
  undefined1 auVar534 [32];
  undefined1 auVar535 [32];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar536 [32];
  undefined1 auVar537 [32];
  undefined1 auVar538 [32];
  undefined1 auVar539 [32];
  undefined1 auVar646 [64];
  undefined1 auVar647 [64];
  undefined1 auVar648 [64];
  undefined1 auVar649 [64];
  undefined1 auVar540 [32];
  undefined1 auVar541 [32];
  undefined1 auVar542 [32];
  undefined1 auVar543 [32];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar544 [32];
  undefined1 auVar545 [32];
  undefined1 auVar546 [32];
  undefined1 auVar547 [32];
  undefined1 auVar548 [32];
  undefined1 auVar549 [32];
  undefined1 auVar650 [64];
  undefined1 auVar651 [64];
  undefined1 auVar652 [64];
  undefined1 auVar653 [64];
  undefined1 auVar654 [64];
  undefined1 auVar655 [64];
  undefined1 auVar656 [64];
  undefined1 auVar657 [64];
  undefined1 auVar658 [64];
  float fVar666;
  float fVar667;
  undefined8 uVar668;
  __m128 magic_zero;
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined8 uVar669;
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined8 uVar721;
  undefined1 auVar688 [32];
  undefined1 auVar689 [32];
  undefined1 auVar690 [32];
  undefined1 auVar691 [32];
  undefined1 auVar692 [32];
  undefined1 auVar693 [32];
  undefined1 auVar694 [32];
  undefined1 auVar695 [32];
  undefined1 auVar696 [32];
  undefined1 auVar697 [32];
  undefined1 auVar698 [32];
  undefined8 uVar720;
  undefined8 uVar722;
  undefined1 auVar699 [32];
  undefined1 auVar700 [32];
  undefined1 auVar701 [32];
  undefined1 auVar702 [32];
  undefined1 auVar703 [32];
  undefined1 auVar673 [16];
  undefined1 auVar704 [32];
  undefined1 auVar705 [32];
  undefined1 auVar706 [32];
  undefined1 auVar707 [32];
  undefined1 auVar708 [32];
  undefined1 auVar709 [32];
  undefined1 auVar710 [32];
  undefined1 auVar711 [32];
  undefined1 auVar713 [32];
  undefined1 auVar714 [32];
  undefined1 auVar715 [32];
  undefined1 auVar685 [16];
  undefined1 auVar716 [32];
  undefined1 auVar717 [32];
  undefined1 auVar719 [32];
  undefined8 uVar723;
  undefined8 uVar724;
  undefined8 uVar725;
  undefined8 uVar726;
  undefined8 uVar727;
  undefined8 uVar728;
  float fVar729;
  float fVar730;
  __m128 magic_zero_4;
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [32];
  undefined1 auVar731 [16];
  undefined1 auVar773 [32];
  undefined1 auVar732 [16];
  undefined1 auVar774 [32];
  undefined1 auVar733 [16];
  undefined1 auVar775 [32];
  undefined1 auVar776 [32];
  undefined1 auVar777 [32];
  undefined1 auVar778 [32];
  undefined1 auVar779 [32];
  undefined1 auVar780 [32];
  undefined1 auVar781 [32];
  undefined1 auVar782 [32];
  undefined1 auVar787 [32];
  undefined1 auVar788 [32];
  undefined1 auVar789 [32];
  undefined1 auVar790 [32];
  undefined1 auVar791 [32];
  undefined1 auVar737 [16];
  undefined1 auVar792 [32];
  undefined1 auVar793 [32];
  undefined1 auVar794 [32];
  undefined1 auVar795 [32];
  undefined1 auVar796 [32];
  undefined1 auVar797 [32];
  undefined1 auVar798 [32];
  undefined1 auVar799 [32];
  undefined1 auVar800 [32];
  undefined1 auVar801 [32];
  undefined1 auVar802 [32];
  undefined1 auVar803 [32];
  undefined1 auVar804 [32];
  undefined1 auVar765 [16];
  undefined1 auVar805 [32];
  undefined1 auVar806 [32];
  undefined1 auVar807 [32];
  undefined1 auVar808 [32];
  undefined1 auVar809 [32];
  undefined1 auVar810 [32];
  undefined1 auVar811 [32];
  undefined1 auVar783 [32];
  undefined1 auVar784 [32];
  undefined1 auVar785 [32];
  undefined1 auVar786 [32];
  undefined1 auVar736 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar812 [64];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar846 [28];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar847 [28];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar848 [32];
  undefined1 auVar849 [32];
  undefined1 auVar850 [32];
  undefined1 auVar819 [16];
  undefined1 auVar851 [32];
  undefined1 auVar852 [32];
  undefined1 auVar858 [32];
  undefined1 auVar859 [32];
  undefined1 auVar860 [32];
  undefined1 auVar861 [32];
  undefined1 auVar862 [32];
  undefined1 auVar863 [32];
  undefined1 auVar828 [16];
  undefined1 auVar864 [32];
  undefined1 auVar829 [16];
  undefined1 auVar865 [32];
  undefined1 auVar866 [32];
  undefined1 auVar867 [32];
  undefined1 auVar868 [32];
  undefined1 auVar869 [32];
  undefined1 auVar870 [32];
  undefined1 auVar871 [32];
  undefined1 auVar872 [32];
  undefined1 auVar873 [32];
  undefined1 auVar874 [32];
  undefined1 auVar875 [32];
  undefined1 auVar876 [32];
  undefined1 auVar877 [32];
  undefined1 auVar878 [32];
  undefined1 auVar879 [32];
  undefined1 auVar880 [32];
  undefined1 auVar881 [32];
  undefined1 auVar882 [32];
  undefined1 auVar883 [32];
  undefined1 auVar884 [32];
  undefined1 auVar833 [16];
  undefined1 auVar885 [32];
  undefined1 auVar886 [32];
  undefined1 auVar887 [32];
  undefined1 auVar888 [32];
  undefined1 auVar889 [32];
  undefined1 auVar890 [32];
  undefined1 auVar834 [16];
  undefined1 auVar891 [32];
  undefined1 auVar892 [32];
  undefined1 auVar893 [32];
  undefined1 auVar894 [32];
  undefined1 auVar895 [32];
  undefined1 auVar896 [32];
  undefined1 auVar897 [32];
  undefined1 auVar898 [32];
  undefined1 auVar899 [32];
  undefined1 auVar900 [32];
  undefined1 auVar901 [32];
  undefined1 auVar902 [32];
  undefined1 auVar903 [32];
  undefined1 auVar904 [32];
  undefined1 auVar905 [32];
  undefined1 auVar906 [32];
  undefined1 auVar907 [32];
  undefined1 auVar853 [32];
  undefined1 auVar854 [32];
  undefined1 auVar855 [32];
  undefined1 auVar856 [32];
  undefined1 auVar857 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar908 [64];
  __m128 magic_zero_2;
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [32];
  undefined1 auVar932 [32];
  undefined1 auVar933 [32];
  undefined1 auVar934 [32];
  undefined1 auVar935 [32];
  undefined1 auVar936 [32];
  undefined1 auVar937 [32];
  undefined1 auVar938 [32];
  undefined1 auVar916 [16];
  undefined1 auVar939 [32];
  undefined1 auVar940 [32];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar941 [32];
  undefined1 auVar942 [32];
  undefined1 auVar919 [16];
  undefined1 auVar943 [32];
  undefined1 auVar946 [32];
  undefined1 auVar947 [32];
  undefined1 auVar948 [32];
  undefined1 auVar949 [32];
  undefined1 auVar950 [32];
  undefined1 auVar924 [16];
  undefined1 auVar951 [32];
  undefined1 auVar952 [32];
  undefined1 auVar925 [16];
  undefined1 auVar953 [32];
  undefined1 auVar954 [32];
  undefined1 auVar926 [16];
  undefined1 auVar955 [32];
  undefined1 auVar944 [32];
  undefined1 auVar920 [16];
  undefined1 auVar945 [32];
  undefined1 auVar921 [16];
  undefined1 auVar957 [32];
  undefined1 auVar958 [32];
  undefined1 auVar959 [32];
  undefined1 auVar960 [64];
  undefined1 auVar956 [32];
  undefined1 auVar961 [64];
  undefined1 auVar962 [16];
  undefined1 auVar963 [16];
  undefined1 auVar964 [16];
  undefined1 auVar965 [16];
  undefined1 auVar966 [16];
  undefined1 auVar967 [16];
  undefined1 auVar968 [16];
  undefined1 auVar969 [16];
  undefined1 auVar970 [16];
  undefined1 auVar981 [16];
  undefined1 auVar982 [16];
  undefined1 auVar983 [16];
  undefined1 auVar984 [16];
  undefined1 auVar985 [16];
  undefined1 auVar986 [16];
  undefined1 auVar987 [16];
  undefined1 auVar988 [16];
  undefined1 auVar989 [32];
  undefined1 auVar990 [32];
  undefined1 auVar991 [32];
  undefined1 auVar992 [32];
  undefined1 auVar993 [32];
  undefined1 auVar994 [32];
  undefined1 auVar995 [32];
  undefined1 auVar996 [32];
  undefined1 auVar997 [32];
  undefined1 auVar998 [32];
  undefined1 auVar999 [32];
  undefined1 auVar971 [16];
  undefined1 auVar1000 [32];
  undefined1 auVar972 [16];
  undefined1 auVar973 [16];
  undefined1 auVar1001 [32];
  undefined1 auVar974 [16];
  undefined1 auVar1002 [32];
  undefined1 auVar975 [16];
  undefined1 auVar1003 [32];
  undefined1 auVar976 [16];
  undefined1 auVar977 [16];
  undefined1 auVar1004 [32];
  undefined1 auVar1005 [32];
  undefined1 auVar978 [16];
  undefined1 auVar979 [16];
  undefined1 auVar1006 [32];
  undefined1 auVar1007 [32];
  undefined1 auVar1008 [32];
  undefined1 auVar1009 [32];
  undefined1 auVar980 [16];
  undefined1 auVar1010 [32];
  undefined1 auVar1011 [32];
  undefined1 auVar1012 [32];
  undefined1 auVar1013 [32];
  undefined1 auVar1014 [32];
  undefined1 auVar1015 [32];
  undefined1 auVar1016 [32];
  undefined1 auVar1017 [32];
  undefined1 auVar1018 [32];
  undefined1 auVar1019 [32];
  undefined1 auVar1020 [16];
  undefined1 auVar1023 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1025 [16];
  undefined1 auVar1026 [16];
  undefined1 auVar1027 [16];
  undefined1 auVar1028 [16];
  undefined1 auVar1029 [16];
  undefined1 auVar1030 [16];
  undefined1 auVar1031 [16];
  undefined1 auVar1032 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1040 [16];
  undefined1 auVar1041 [16];
  undefined1 auVar1042 [16];
  undefined1 auVar1043 [32];
  undefined1 auVar1044 [32];
  undefined1 auVar1021 [16];
  undefined1 auVar1045 [32];
  undefined1 auVar1022 [16];
  undefined1 auVar1046 [32];
  undefined1 auVar1047 [32];
  undefined1 auVar1048 [32];
  undefined1 auVar1049 [32];
  undefined1 auVar1050 [32];
  undefined1 auVar1051 [32];
  undefined1 auVar1052 [32];
  undefined1 auVar1053 [32];
  undefined1 auVar1054 [32];
  undefined1 auVar1055 [32];
  undefined1 auVar1056 [32];
  undefined1 auVar1057 [32];
  undefined1 auVar1058 [32];
  undefined1 auVar1059 [32];
  undefined1 auVar1060 [32];
  undefined1 auVar1061 [32];
  undefined1 auVar1062 [32];
  undefined1 auVar1063 [32];
  undefined1 auVar1064 [32];
  undefined1 auVar1065 [32];
  undefined1 auVar1066 [32];
  undefined1 auVar1067 [32];
  undefined1 auVar1068 [32];
  undefined1 auVar1069 [32];
  undefined1 auVar1070 [32];
  undefined1 auVar1071 [32];
  undefined1 auVar1072 [32];
  undefined1 auVar1073 [32];
  undefined1 auVar1074 [32];
  v4sf one;
  undefined1 auVar1075 [16];
  undefined1 auVar1076 [16];
  undefined1 auVar1077 [16];
  undefined1 auVar1078 [16];
  undefined1 auVar1079 [16];
  undefined1 auVar1080 [16];
  undefined1 auVar1081 [16];
  undefined1 auVar1082 [16];
  undefined1 auVar1083 [16];
  undefined1 auVar1084 [16];
  undefined1 auVar1085 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1088 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar1090 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1096 [16];
  undefined1 auVar1097 [16];
  undefined1 auVar1098 [32];
  undefined1 auVar1099 [32];
  undefined1 auVar1100 [32];
  undefined1 auVar1101 [32];
  undefined1 auVar1102 [32];
  undefined1 auVar1103 [32];
  undefined1 auVar1104 [32];
  undefined1 auVar1105 [32];
  undefined1 auVar1106 [32];
  undefined1 auVar1107 [32];
  undefined1 auVar1108 [32];
  undefined1 auVar1109 [32];
  undefined1 auVar1110 [32];
  undefined1 auVar1111 [32];
  undefined1 auVar1112 [32];
  undefined1 auVar1113 [32];
  undefined1 auVar1114 [32];
  undefined1 auVar1115 [32];
  undefined1 auVar1116 [32];
  undefined1 auVar1117 [32];
  undefined1 auVar1118 [32];
  undefined1 auVar1119 [32];
  undefined1 auVar1120 [32];
  undefined1 auVar1121 [32];
  undefined1 auVar1122 [32];
  undefined1 auVar1123 [32];
  undefined1 auVar1124 [32];
  undefined1 auVar1125 [32];
  undefined1 auVar1126 [32];
  undefined1 auVar1127 [32];
  v4sf one_1;
  undefined1 auVar1128 [16];
  undefined1 auVar1129 [16];
  undefined1 auVar1130 [16];
  undefined1 auVar1131 [16];
  undefined1 auVar1132 [16];
  undefined1 auVar1133 [16];
  undefined1 auVar1134 [16];
  undefined1 auVar1135 [16];
  undefined1 auVar1136 [16];
  undefined1 auVar1137 [16];
  undefined1 auVar1138 [16];
  undefined1 auVar1139 [16];
  undefined1 auVar1140 [16];
  undefined1 auVar1141 [16];
  undefined1 auVar1142 [16];
  undefined1 auVar1143 [16];
  undefined1 auVar1144 [16];
  undefined1 auVar1145 [16];
  undefined1 auVar1146 [16];
  undefined1 auVar1147 [16];
  undefined1 auVar1148 [16];
  undefined1 auVar1149 [16];
  undefined1 auVar1150 [16];
  undefined1 auVar1151 [32];
  undefined1 auVar1152 [32];
  undefined1 auVar1153 [32];
  undefined1 auVar1154 [32];
  undefined1 auVar1155 [32];
  undefined1 auVar1156 [32];
  undefined1 auVar1157 [32];
  undefined1 auVar1158 [32];
  undefined1 auVar1159 [32];
  undefined1 auVar1160 [32];
  undefined1 auVar1161 [32];
  undefined1 auVar1162 [32];
  undefined1 auVar1163 [32];
  undefined1 auVar1164 [32];
  undefined1 auVar1165 [32];
  undefined1 auVar1166 [32];
  undefined1 auVar1167 [32];
  undefined1 auVar1168 [32];
  undefined1 auVar1169 [32];
  undefined1 auVar1170 [32];
  undefined1 auVar1171 [32];
  undefined1 auVar1172 [32];
  undefined1 auVar1173 [32];
  undefined1 auVar1174 [32];
  v4sf one_5;
  undefined1 auVar1175 [16];
  undefined1 auVar1176 [16];
  undefined1 auVar1177 [16];
  undefined1 auVar1178 [16];
  undefined1 auVar1179 [16];
  undefined1 auVar1180 [16];
  undefined1 auVar1181 [16];
  undefined1 auVar1182 [16];
  undefined1 auVar1183 [16];
  undefined1 auVar1184 [16];
  undefined1 auVar1185 [16];
  undefined1 auVar1186 [16];
  undefined1 auVar1187 [16];
  undefined1 auVar1188 [16];
  undefined1 auVar1189 [16];
  undefined1 auVar1190 [16];
  undefined1 auVar1191 [16];
  undefined1 auVar1192 [16];
  undefined1 auVar1193 [16];
  undefined1 auVar1194 [16];
  undefined1 auVar1195 [16];
  undefined1 auVar1196 [16];
  undefined1 auVar1197 [16];
  undefined1 auVar1198 [32];
  undefined1 auVar1199 [32];
  undefined1 auVar1200 [32];
  undefined1 auVar1201 [32];
  undefined1 auVar1202 [32];
  undefined1 auVar1203 [32];
  undefined1 auVar1204 [32];
  undefined1 auVar1205 [32];
  undefined1 auVar1206 [32];
  undefined1 auVar1207 [32];
  undefined1 auVar1208 [32];
  undefined1 auVar1209 [32];
  undefined1 auVar1210 [32];
  undefined1 auVar1211 [32];
  undefined1 auVar1212 [32];
  undefined1 auVar1213 [32];
  undefined1 auVar1214 [32];
  undefined1 auVar1215 [32];
  undefined1 auVar1216 [32];
  undefined1 auVar1217 [32];
  undefined1 auVar1218 [32];
  undefined1 auVar1219 [32];
  undefined1 auVar1220 [32];
  undefined1 auVar1221 [32];
  undefined1 auVar1222 [32];
  undefined1 auVar1223 [32];
  undefined1 auVar1224 [32];
  undefined1 auVar1225 [16];
  undefined1 auVar1226 [16];
  undefined1 auVar1227 [16];
  undefined1 auVar1228 [16];
  undefined1 auVar1229 [16];
  undefined1 auVar1230 [16];
  undefined1 auVar1231 [16];
  undefined1 auVar1232 [16];
  undefined1 auVar1233 [16];
  undefined1 auVar1234 [16];
  undefined1 auVar1235 [16];
  undefined1 auVar1236 [16];
  undefined1 auVar1237 [16];
  undefined1 auVar1238 [16];
  undefined1 auVar1239 [16];
  undefined1 auVar1240 [16];
  undefined1 auVar1241 [16];
  undefined1 auVar1242 [16];
  undefined1 auVar1243 [16];
  undefined1 auVar1244 [16];
  undefined1 auVar1245 [16];
  undefined1 auVar1246 [16];
  undefined1 auVar1247 [16];
  undefined1 auVar1248 [32];
  undefined1 auVar1249 [32];
  undefined1 auVar1250 [32];
  undefined1 auVar1251 [32];
  undefined1 auVar1252 [32];
  undefined1 auVar1253 [32];
  undefined1 auVar1254 [32];
  undefined1 auVar1255 [32];
  undefined1 auVar1256 [32];
  undefined1 auVar1257 [32];
  undefined1 auVar1258 [32];
  undefined1 auVar1259 [32];
  undefined1 auVar1260 [32];
  undefined1 auVar1261 [32];
  undefined1 auVar1262 [32];
  undefined1 auVar1263 [32];
  undefined1 auVar1264 [32];
  undefined1 auVar1265 [32];
  undefined1 auVar1266 [32];
  undefined1 auVar1267 [32];
  undefined1 auVar1268 [32];
  undefined1 auVar1269 [32];
  undefined1 auVar1270 [32];
  undefined1 auVar1271 [32];
  undefined1 auVar1272 [32];
  undefined1 auVar1273 [16];
  undefined1 auVar1274 [16];
  undefined1 auVar1275 [16];
  undefined1 auVar1276 [16];
  undefined1 auVar1277 [16];
  undefined1 auVar1278 [16];
  undefined1 auVar1279 [16];
  undefined1 auVar1280 [16];
  undefined1 auVar1281 [16];
  undefined1 auVar1282 [16];
  undefined1 auVar1283 [16];
  undefined1 auVar1284 [16];
  undefined1 auVar1285 [16];
  undefined1 auVar1286 [16];
  undefined1 auVar1287 [16];
  undefined1 auVar1288 [16];
  undefined1 auVar1289 [16];
  undefined1 auVar1290 [16];
  undefined1 auVar1291 [16];
  undefined1 auVar1292 [16];
  undefined1 auVar1293 [16];
  undefined1 auVar1294 [16];
  undefined1 auVar1295 [16];
  undefined1 auVar1296 [32];
  undefined1 auVar1297 [32];
  undefined1 auVar1298 [32];
  undefined1 auVar1299 [32];
  undefined1 auVar1300 [32];
  undefined1 auVar1301 [32];
  undefined1 auVar1302 [32];
  undefined1 auVar1303 [32];
  undefined1 auVar1304 [32];
  undefined1 auVar1305 [32];
  undefined1 auVar1306 [32];
  undefined1 auVar1307 [32];
  undefined1 auVar1308 [32];
  undefined1 auVar1309 [32];
  undefined1 auVar1310 [32];
  undefined1 auVar1311 [32];
  undefined1 auVar1312 [32];
  undefined1 auVar1313 [32];
  undefined1 auVar1314 [32];
  undefined1 auVar1315 [32];
  undefined1 auVar1316 [32];
  undefined1 auVar1317 [32];
  undefined1 auVar1318 [32];
  undefined1 auVar1319 [32];
  undefined1 auVar1320 [32];
  undefined1 auVar1321 [32];
  undefined1 auVar1322 [32];
  undefined1 auVar1323 [32];
  undefined1 auVar1324 [32];
  undefined1 auVar1325 [32];
  undefined1 auVar1326 [32];
  undefined1 auVar1327 [16];
  undefined1 auVar1328 [16];
  undefined1 auVar1329 [16];
  undefined1 auVar1330 [16];
  undefined1 auVar1331 [16];
  undefined1 auVar1332 [16];
  undefined1 auVar1333 [16];
  undefined1 auVar1334 [16];
  undefined1 auVar1335 [16];
  undefined1 auVar1336 [16];
  undefined1 auVar1337 [16];
  undefined1 auVar1338 [16];
  undefined1 auVar1339 [16];
  undefined1 auVar1340 [16];
  undefined1 auVar1341 [16];
  undefined1 auVar1342 [16];
  undefined1 auVar1343 [16];
  undefined1 auVar1344 [16];
  undefined1 auVar1345 [16];
  undefined1 auVar1346 [16];
  undefined1 auVar1347 [16];
  undefined1 auVar1348 [16];
  undefined1 auVar1349 [16];
  undefined1 auVar1350 [32];
  undefined1 auVar1351 [32];
  undefined1 auVar1352 [32];
  undefined1 auVar1353 [32];
  undefined1 auVar1354 [32];
  undefined1 auVar1355 [32];
  undefined1 auVar1356 [32];
  undefined1 auVar1357 [32];
  undefined1 auVar1358 [32];
  undefined1 auVar1359 [32];
  undefined1 auVar1360 [32];
  undefined1 auVar1361 [32];
  undefined1 auVar1362 [32];
  undefined1 auVar1363 [32];
  undefined1 auVar1364 [32];
  undefined1 auVar1365 [32];
  undefined1 auVar1366 [32];
  undefined1 auVar1367 [32];
  undefined1 auVar1368 [32];
  undefined1 auVar1369 [32];
  undefined1 auVar1370 [32];
  undefined1 auVar1371 [32];
  undefined1 auVar1372 [32];
  undefined1 auVar1373 [32];
  undefined1 auVar1374 [32];
  undefined1 auVar1375 [32];
  undefined1 auVar1376 [32];
  undefined1 auVar1377 [32];
  undefined1 auVar1378 [32];
  undefined1 auVar1379 [32];
  undefined1 auVar1380 [32];
  undefined1 auVar1381 [16];
  undefined1 auVar1382 [16];
  undefined1 auVar1383 [16];
  undefined1 auVar1384 [16];
  undefined1 auVar1385 [16];
  undefined1 auVar1386 [16];
  undefined1 auVar1387 [16];
  undefined1 auVar1388 [16];
  undefined1 auVar1389 [16];
  undefined1 auVar1390 [16];
  undefined1 auVar1391 [16];
  undefined1 auVar1392 [16];
  undefined1 auVar1393 [16];
  undefined1 auVar1394 [16];
  undefined1 auVar1395 [16];
  undefined1 auVar1396 [16];
  undefined1 auVar1397 [16];
  undefined1 auVar1398 [16];
  undefined1 auVar1399 [16];
  undefined1 auVar1400 [16];
  undefined1 auVar1401 [16];
  undefined1 auVar1402 [16];
  undefined1 auVar1403 [16];
  undefined1 auVar1404 [32];
  undefined1 auVar1405 [32];
  undefined1 auVar1406 [32];
  undefined1 auVar1407 [32];
  undefined1 auVar1408 [32];
  undefined1 auVar1409 [32];
  undefined1 auVar1410 [32];
  undefined1 auVar1411 [32];
  undefined1 auVar1412 [32];
  undefined1 auVar1413 [32];
  undefined1 auVar1414 [32];
  undefined1 auVar1415 [32];
  undefined1 auVar1416 [32];
  undefined1 auVar1417 [32];
  undefined1 auVar1418 [32];
  undefined1 auVar1419 [32];
  undefined1 auVar1420 [32];
  undefined1 auVar1421 [32];
  undefined1 auVar1422 [32];
  undefined1 auVar1423 [32];
  undefined1 auVar1424 [32];
  undefined1 auVar1425 [32];
  undefined1 auVar1426 [32];
  undefined1 auVar1427 [32];
  undefined1 auVar1428 [32];
  undefined1 auVar1429 [32];
  undefined1 auVar1430 [32];
  undefined1 auVar1431 [32];
  undefined1 auVar1432 [32];
  undefined1 auVar1433 [32];
  undefined1 auVar1434 [32];
  undefined1 auVar1435 [16];
  undefined1 auVar1436 [16];
  undefined1 auVar1437 [16];
  undefined1 auVar1438 [16];
  undefined1 auVar1439 [16];
  undefined1 auVar1440 [16];
  undefined1 auVar1441 [16];
  undefined1 auVar1442 [16];
  undefined1 auVar1443 [16];
  undefined1 auVar1444 [16];
  undefined1 auVar1445 [16];
  undefined1 auVar1446 [16];
  undefined1 auVar1447 [16];
  undefined1 auVar1448 [16];
  undefined1 auVar1449 [16];
  undefined1 auVar1450 [16];
  undefined1 auVar1451 [16];
  undefined1 auVar1452 [16];
  undefined1 auVar1453 [16];
  undefined1 auVar1454 [16];
  undefined1 auVar1455 [16];
  undefined1 auVar1456 [16];
  undefined1 auVar1457 [16];
  undefined1 auVar1458 [32];
  undefined1 auVar1459 [32];
  undefined1 auVar1460 [32];
  undefined1 auVar1461 [32];
  undefined1 auVar1462 [32];
  undefined1 auVar1463 [32];
  undefined1 auVar1464 [32];
  undefined1 auVar1465 [32];
  undefined1 auVar1466 [32];
  undefined1 auVar1467 [32];
  undefined1 auVar1468 [32];
  undefined1 auVar1469 [32];
  undefined1 auVar1470 [32];
  undefined1 auVar1471 [32];
  undefined1 auVar1472 [32];
  undefined1 auVar1473 [32];
  undefined1 auVar1474 [32];
  undefined1 auVar1475 [32];
  undefined1 auVar1476 [32];
  undefined1 auVar1477 [32];
  undefined1 auVar1478 [32];
  undefined1 auVar1479 [32];
  undefined1 auVar1480 [32];
  undefined1 auVar1481 [32];
  undefined1 auVar1482 [32];
  undefined1 auVar1483 [32];
  undefined1 auVar1484 [32];
  undefined1 auVar1485 [32];
  undefined1 auVar1486 [32];
  undefined1 auVar1487 [32];
  undefined1 auVar1488 [32];
  __m128 magic_zero_3;
  undefined1 auVar1489 [16];
  undefined1 auVar1490 [16];
  undefined1 auVar1491 [16];
  undefined1 auVar1492 [16];
  undefined1 auVar1493 [16];
  undefined1 auVar1494 [16];
  undefined1 auVar1495 [16];
  undefined1 auVar1496 [16];
  undefined1 auVar1497 [16];
  undefined1 auVar1498 [16];
  undefined1 auVar1499 [16];
  undefined1 auVar1500 [16];
  undefined1 auVar1501 [16];
  undefined1 auVar1502 [16];
  undefined1 auVar1503 [16];
  undefined1 auVar1504 [16];
  undefined1 auVar1505 [16];
  undefined1 auVar1506 [16];
  undefined1 auVar1507 [16];
  undefined1 auVar1508 [16];
  undefined1 auVar1509 [16];
  undefined1 auVar1510 [16];
  undefined1 auVar1511 [32];
  undefined1 auVar1512 [32];
  undefined1 auVar1513 [32];
  undefined1 auVar1514 [32];
  undefined1 auVar1515 [32];
  undefined1 auVar1516 [32];
  undefined1 auVar1517 [32];
  undefined1 auVar1518 [32];
  undefined1 auVar1519 [32];
  undefined1 auVar1520 [32];
  undefined1 auVar1521 [32];
  undefined1 auVar1522 [32];
  undefined1 auVar1523 [32];
  undefined1 auVar1524 [32];
  undefined1 auVar1525 [32];
  undefined1 auVar1526 [32];
  undefined1 auVar1527 [32];
  undefined1 auVar1528 [32];
  undefined1 auVar1529 [32];
  undefined1 auVar1530 [32];
  undefined1 auVar1531 [32];
  undefined1 auVar1532 [32];
  undefined1 auVar1533 [32];
  undefined1 auVar1534 [32];
  undefined1 auVar1535 [32];
  undefined1 auVar1536 [32];
  undefined1 auVar1537 [32];
  undefined1 auVar1538 [32];
  undefined1 auVar1539 [32];
  undefined1 auVar1540 [32];
  undefined1 auVar1541 [32];
  undefined1 auVar1542 [16];
  undefined1 auVar1543 [16];
  undefined1 auVar1544 [16];
  undefined1 auVar1545 [16];
  undefined1 auVar1546 [16];
  undefined1 auVar1547 [16];
  undefined1 auVar1548 [16];
  undefined1 auVar1549 [16];
  undefined1 auVar1550 [16];
  undefined1 auVar1551 [16];
  undefined1 auVar1552 [16];
  undefined1 auVar1553 [16];
  undefined1 auVar1554 [16];
  undefined1 auVar1555 [16];
  undefined1 auVar1556 [16];
  undefined1 auVar1557 [16];
  undefined1 auVar1558 [16];
  undefined1 auVar1559 [16];
  undefined1 auVar1560 [16];
  undefined1 auVar1561 [16];
  undefined1 auVar1562 [16];
  undefined1 auVar1563 [16];
  undefined1 auVar1564 [32];
  undefined1 auVar1565 [32];
  undefined1 auVar1566 [32];
  undefined1 auVar1567 [32];
  undefined1 auVar1568 [32];
  undefined1 auVar1569 [32];
  undefined1 auVar1570 [32];
  undefined1 auVar1571 [32];
  undefined1 auVar1572 [32];
  undefined1 auVar1573 [32];
  undefined1 auVar1574 [32];
  undefined1 auVar1575 [32];
  undefined1 auVar1576 [32];
  undefined1 auVar1577 [32];
  undefined1 auVar1578 [32];
  undefined1 auVar1579 [32];
  undefined1 auVar1580 [32];
  undefined1 auVar1581 [32];
  undefined1 auVar1582 [32];
  undefined1 auVar1583 [32];
  undefined1 auVar1584 [32];
  undefined1 auVar1585 [32];
  undefined1 auVar1586 [32];
  undefined1 auVar1587 [32];
  undefined1 auVar1588 [32];
  undefined1 auVar1589 [32];
  undefined1 auVar1590 [32];
  undefined1 auVar1591 [32];
  undefined1 auVar1592 [32];
  undefined1 auVar1593 [32];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar1594 [64];
  undefined1 auVar1595 [64];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM27 [64];
  undefined1 in_ZMM28 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  undefined1 in_ZMM31 [64];
  undefined4 in_stack_fffffffffffffe78;
  undefined4 uVar1596;
  undefined1 in_stack_fffffffffffffe7c [12];
  undefined1 auVar1597 [12];
  undefined1 (*pauVar1598) [64];
  float *pfVar1599;
  undefined8 uVar1600;
  float *pfVar1601;
  undefined8 in_stack_fffffffffffffe90;
  undefined8 uVar1602;
  undefined1 in_stack_fffffffffffffe98 [16];
  undefined1 in_stack_fffffffffffffea8 [16];
  undefined1 in_stack_fffffffffffffeb8 [16];
  undefined4 uVar1603;
  float fVar1604;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar8;
  undefined1 auVar351 [16];
  undefined1 auVar356 [16];
  undefined1 auVar444 [32];
  undefined1 auVar495 [32];
  undefined1 auVar499 [32];
  undefined1 auVar712 [32];
  undefined1 auVar718 [32];
  
  afVar275 = _ps512_cephes_log_q2;
  afVar274 = _ps512_cephes_log_q1;
  afVar273 = _ps512_cephes_log_p8;
  afVar272 = _ps512_cephes_log_p7;
  afVar271 = _ps512_cephes_log_p6;
  afVar270 = _ps512_cephes_log_p5;
  afVar269 = _ps512_cephes_log_p4;
  afVar268 = _ps512_cephes_log_p3;
  afVar267 = _ps512_cephes_log_p2;
  afVar266 = _ps512_cephes_log_p1;
  afVar265 = _ps512_cephes_log_p0;
  afVar263 = ::_ps512_cephes_exp_p5;
  afVar262 = ::_ps512_cephes_exp_p4;
  afVar261 = ::_ps512_cephes_exp_p3;
  afVar260 = ::_ps512_cephes_exp_p2;
  afVar259 = ::_ps512_cephes_exp_p1;
  afVar258 = ::_ps512_cephes_exp_p0;
  afVar257 = ::_ps512_cephes_LOG2EF;
  afVar256 = ::_ps512_exp_lo;
  afVar255 = ::_ps512_exp_hi;
  afVar254 = ::_ps512_1;
  auVar287 = in_ZMM28._0_16_;
  auVar351 = in_ZMM26._0_16_;
  auVar350 = in_ZMM29._0_16_;
  if (0xb < (uint)op_type) {
    return;
  }
  __return_storage_ptr__ = (__m512 *)(ulong)(uint)bp;
  auVar356 = in_ZMM31._0_16_;
  auVar354 = ::_ps512_exp_lo._0_16_;
  auVar355 = _ps512_cephes_log_q2._0_16_;
  switch(op_type) {
  case 1:
    iVar278 = bw;
    if (bw < aw) {
      iVar278 = aw;
    }
    iVar276 = bp;
    if (bp < ap) {
      iVar276 = ap;
    }
    iVar277 = iVar276 * iVar278;
    if (ap != bp) {
LAB_00381749:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (iVar276 == 0x10) {
          iVar277 = 0;
          if (0 < iVar278) {
            iVar277 = iVar278;
          }
          while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
            fVar666 = *ptr1;
            auVar183._4_4_ = fVar666;
            auVar183._0_4_ = fVar666;
            auVar183._8_4_ = fVar666;
            auVar183._12_4_ = fVar666;
            auVar183._16_4_ = fVar666;
            auVar183._20_4_ = fVar666;
            auVar183._24_4_ = fVar666;
            auVar183._28_4_ = fVar666;
            auVar183._32_4_ = fVar666;
            auVar183._36_4_ = fVar666;
            auVar183._40_4_ = fVar666;
            auVar183._44_4_ = fVar666;
            auVar183._48_4_ = fVar666;
            auVar183._52_4_ = fVar666;
            auVar183._56_4_ = fVar666;
            auVar183._60_4_ = fVar666;
            auVar1594 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar183);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
          }
        }
        if (iVar276 == 8) {
          for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
            fVar666 = *ptr1;
            fVar667 = ptr1[1];
            auVar779._4_4_ = fVar667;
            auVar779._0_4_ = fVar667;
            auVar779._8_4_ = fVar667;
            auVar779._12_4_ = fVar667;
            auVar779._16_4_ = fVar667;
            auVar779._20_4_ = fVar667;
            auVar779._24_4_ = fVar667;
            auVar779._28_4_ = fVar667;
            auVar1594 = vinsertf64x4_avx512f
                                  (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar779,
                                   1);
            auVar1594 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar1594);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
          }
          for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
            fVar666 = *ptr1;
            auVar175._4_4_ = fVar666;
            auVar175._0_4_ = fVar666;
            auVar175._8_4_ = fVar666;
            auVar175._12_4_ = fVar666;
            auVar175._16_4_ = fVar666;
            auVar175._20_4_ = fVar666;
            auVar175._24_4_ = fVar666;
            auVar175._28_4_ = fVar666;
            auVar411 = vsubps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar175);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          }
        }
        if (iVar276 != 4) {
          return;
        }
        for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
          fVar666 = ptr1[uVar279 + 3];
          auVar696._20_4_ = fVar666;
          auVar696._16_4_ = fVar666;
          auVar696._24_4_ = fVar666;
          auVar696._28_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 2];
          auVar696._4_4_ = fVar666;
          auVar696._0_4_ = fVar666;
          auVar696._8_4_ = fVar666;
          auVar696._12_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 1];
          fVar667 = ptr1[uVar279];
          auVar1594 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar696,1);
          auVar1594 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar1594);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
          fVar666 = ptr1[uVar279 + 1];
          auVar780._20_4_ = fVar666;
          auVar780._16_4_ = fVar666;
          auVar780._24_4_ = fVar666;
          auVar780._28_4_ = fVar666;
          fVar666 = ptr1[uVar279];
          auVar780._4_4_ = fVar666;
          auVar780._0_4_ = fVar666;
          auVar780._8_4_ = fVar666;
          auVar780._12_4_ = fVar666;
          auVar411 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar780);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        lVar280 = 0;
        for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
            uVar283 = (ulong)((int)uVar283 + 1)) {
          uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
          auVar91._4_4_ = uVar1603;
          auVar91._0_4_ = uVar1603;
          auVar91._8_4_ = uVar1603;
          auVar91._12_4_ = uVar1603;
          auVar287 = vsubps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar280 * 4)
                                     ,auVar91);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar287;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (bw == 1) {
        auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        for (iVar278 = 0xf; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
          auVar1595 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar1594);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        fVar666 = *ptr1;
        auVar707._4_4_ = fVar666;
        auVar707._0_4_ = fVar666;
        auVar707._8_4_ = fVar666;
        auVar707._12_4_ = fVar666;
        auVar707._16_4_ = fVar666;
        auVar707._20_4_ = fVar666;
        auVar707._24_4_ = fVar666;
        auVar707._28_4_ = fVar666;
        for (iVar278 = iVar278 + -0xc; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
          auVar411 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar707);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        fVar666 = *ptr1;
        auVar677._4_4_ = fVar666;
        auVar677._0_4_ = fVar666;
        auVar677._8_4_ = fVar666;
        auVar677._12_4_ = fVar666;
        lVar280 = 0;
        for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
          auVar287 = vsubps_avx(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar280 * 4),
                                auVar677);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar287;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar276 == 0x10) {
        auVar1594 = *(undefined1 (*) [64])ptr;
        iVar277 = iVar278;
        while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
          fVar666 = *ptr1;
          auVar184._4_4_ = fVar666;
          auVar184._0_4_ = fVar666;
          auVar184._8_4_ = fVar666;
          auVar184._12_4_ = fVar666;
          auVar184._16_4_ = fVar666;
          auVar184._20_4_ = fVar666;
          auVar184._24_4_ = fVar666;
          auVar184._28_4_ = fVar666;
          auVar184._32_4_ = fVar666;
          auVar184._36_4_ = fVar666;
          auVar184._40_4_ = fVar666;
          auVar184._44_4_ = fVar666;
          auVar184._48_4_ = fVar666;
          auVar184._52_4_ = fVar666;
          auVar184._56_4_ = fVar666;
          auVar184._60_4_ = fVar666;
          auVar1595 = vsubps_avx512f(auVar1594,auVar184);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
        }
      }
      if (iVar276 == 8) {
        auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
          fVar666 = *ptr1;
          fVar667 = ptr1[1];
          auVar877._4_4_ = fVar667;
          auVar877._0_4_ = fVar667;
          auVar877._8_4_ = fVar667;
          auVar877._12_4_ = fVar667;
          auVar877._16_4_ = fVar667;
          auVar877._20_4_ = fVar667;
          auVar877._24_4_ = fVar667;
          auVar877._28_4_ = fVar667;
          auVar1595 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar877,
                                 1);
          auVar1595 = vsubps_avx512f(auVar1594,auVar1595);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          fVar666 = *ptr1;
          auVar176._4_4_ = fVar666;
          auVar176._0_4_ = fVar666;
          auVar176._8_4_ = fVar666;
          auVar176._12_4_ = fVar666;
          auVar176._16_4_ = fVar666;
          auVar176._20_4_ = fVar666;
          auVar176._24_4_ = fVar666;
          auVar176._28_4_ = fVar666;
          auVar411 = vsubps_avx512vl(auVar1594._0_32_,auVar176);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      if (iVar276 != 4) {
        return;
      }
      auVar1594 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar287 = auVar1594._0_16_;
      auVar799._0_16_ = ZEXT116(0) * auVar287 + ZEXT116(1) * auVar287;
      auVar799._16_16_ = ZEXT116(0) * auVar1594._16_16_ + ZEXT116(1) * auVar287;
      for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
        fVar666 = ptr1[uVar279 + 3];
        auVar878._20_4_ = fVar666;
        auVar878._16_4_ = fVar666;
        auVar878._24_4_ = fVar666;
        auVar878._28_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 2];
        auVar878._4_4_ = fVar666;
        auVar878._0_4_ = fVar666;
        auVar878._8_4_ = fVar666;
        auVar878._12_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        auVar1595 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar878,1);
        auVar1595 = vsubps_avx512f(auVar1594,auVar1595);
        *(undefined1 (*) [64])outptr = auVar1595;
        outptr = (float *)((long)outptr + 0x40);
      }
      for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
        fVar666 = ptr1[uVar279 + 1];
        auVar879._20_4_ = fVar666;
        auVar879._16_4_ = fVar666;
        auVar879._24_4_ = fVar666;
        auVar879._28_4_ = fVar666;
        fVar666 = ptr1[uVar279];
        auVar879._4_4_ = fVar666;
        auVar879._0_4_ = fVar666;
        auVar879._8_4_ = fVar666;
        auVar879._12_4_ = fVar666;
        auVar411 = vsubps_avx(auVar799,auVar879);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
        auVar92._4_4_ = uVar1603;
        auVar92._0_4_ = uVar1603;
        auVar92._8_4_ = uVar1603;
        auVar92._12_4_ = uVar1603;
        auVar350 = vsubps_avx512vl(auVar287,auVar92);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar350;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw == bw) {
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1594 = vsubps_avx512f(*(undefined1 (*) [64])(ptr + uVar279),
                                   *(undefined1 (*) [64])(ptr1 + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1594;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = vsubps_avx(*(undefined1 (*) [32])(ptr + uVar279),
                              *(undefined1 (*) [32])(ptr1 + uVar279));
        *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar287 = vsubps_avx(*(undefined1 (*) [16])(ptr + uVar279),
                              *(undefined1 (*) [16])(ptr1 + uVar279));
        *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        *(float *)((long)outptr + uVar279 * 4 + lVar280) =
             *(float *)((long)ptr + uVar279 * 4 + lVar280) -
             *(float *)((long)ptr1 + uVar279 * 4 + lVar280);
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_00381749;
      fVar666 = *ptr;
      if (iVar276 == 4) {
        auVar756 = *(undefined1 (*) [16])ptr;
        auVar1594 = ZEXT3264(CONCAT1616(auVar756,auVar756));
      }
      else {
        auVar756._4_4_ = fVar666;
        auVar756._0_4_ = fVar666;
        auVar756._8_4_ = fVar666;
        auVar756._12_4_ = fVar666;
        if (iVar276 == 8) {
          auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar905._4_4_ = fVar666;
          auVar905._0_4_ = fVar666;
          auVar905._8_4_ = fVar666;
          auVar905._12_4_ = fVar666;
          auVar905._16_4_ = fVar666;
          auVar905._20_4_ = fVar666;
          auVar905._24_4_ = fVar666;
          auVar905._28_4_ = fVar666;
          auVar1594 = ZEXT3264(auVar905);
          if (iVar276 == 0x10) {
            auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_0038b6df;
          }
        }
      }
      auVar905 = auVar1594._0_32_;
      auVar1594 = vinserti64x4_avx512f(auVar1594,auVar905,1);
LAB_0038b6df:
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1595 = vsubps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr1 + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = vsubps_avx(auVar905,*(undefined1 (*) [32])(ptr1 + uVar279));
        *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar287 = vsubps_avx(auVar756,*(undefined1 (*) [16])(ptr1 + uVar279));
        *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        *(float *)((long)outptr + uVar279 * 4 + lVar280) =
             fVar666 - *(float *)((long)ptr1 + uVar279 * 4 + lVar280);
        lVar280 = lVar280 + 4;
      }
      return;
    }
    fVar666 = *ptr1;
    if (iVar276 == 4) {
      auVar745 = *(undefined1 (*) [16])ptr1;
      auVar1594 = ZEXT3264(CONCAT1616(auVar745,auVar745));
    }
    else {
      auVar745._4_4_ = fVar666;
      auVar745._0_4_ = fVar666;
      auVar745._8_4_ = fVar666;
      auVar745._12_4_ = fVar666;
      if (iVar276 == 8) {
        auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar887._4_4_ = fVar666;
        auVar887._0_4_ = fVar666;
        auVar887._8_4_ = fVar666;
        auVar887._12_4_ = fVar666;
        auVar887._16_4_ = fVar666;
        auVar887._20_4_ = fVar666;
        auVar887._24_4_ = fVar666;
        auVar887._28_4_ = fVar666;
        auVar1594 = ZEXT3264(auVar887);
        if (iVar276 == 0x10) {
          auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_00387a43;
        }
      }
    }
    auVar887 = auVar1594._0_32_;
    auVar1594 = vinserti64x4_avx512f(auVar1594,auVar887,1);
LAB_00387a43:
    for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar1595 = vsubps_avx512f(*(undefined1 (*) [64])(ptr + uVar279),auVar1594);
      *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
    }
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      auVar411 = vsubps_avx(*(undefined1 (*) [32])(ptr + uVar279),auVar887);
      *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
    }
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      auVar287 = vsubps_avx(*(undefined1 (*) [16])(ptr + uVar279),auVar745);
      *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      *(float *)((long)outptr + uVar279 * 4 + lVar280) =
           *(float *)((long)ptr + uVar279 * 4 + lVar280) - fVar666;
      lVar280 = lVar280 + 4;
    }
    return;
  case 2:
    iVar278 = bw;
    if (bw < aw) {
      iVar278 = aw;
    }
    iVar276 = bp;
    if (bp < ap) {
      iVar276 = ap;
    }
    iVar277 = iVar276 * iVar278;
    if (ap != bp) {
LAB_0038115e:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (iVar276 == 0x10) {
          iVar277 = 0;
          if (0 < iVar278) {
            iVar277 = iVar278;
          }
          while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
            auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar1594 = vmulps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
          }
        }
        if (iVar276 == 8) {
          for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
            fVar666 = *ptr1;
            fVar667 = ptr1[1];
            auVar776._4_4_ = fVar667;
            auVar776._0_4_ = fVar667;
            auVar776._8_4_ = fVar667;
            auVar776._12_4_ = fVar667;
            auVar776._16_4_ = fVar667;
            auVar776._20_4_ = fVar667;
            auVar776._24_4_ = fVar667;
            auVar776._28_4_ = fVar667;
            auVar1594 = vinsertf64x4_avx512f
                                  (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar776,
                                   1);
            auVar1594 = vmulps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
          }
          for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
            fVar666 = *ptr1;
            fVar667 = *(float *)(*(undefined1 (*) [64])ptr + 4);
            fVar1604 = *(float *)(*(undefined1 (*) [64])ptr + 8);
            fVar730 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            fVar233 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            fVar234 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            fVar729 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            *(float *)*(undefined1 (*) [64])outptr = fVar666 * *(float *)*(undefined1 (*) [64])ptr;
            *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar666 * fVar667;
            *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar666 * fVar1604;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar666 * fVar730;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar666 * fVar233;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar666 * fVar234;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar666 * fVar729;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar666;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          }
        }
        if (iVar276 != 4) {
          return;
        }
        for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
          fVar666 = ptr1[uVar279 + 3];
          auVar691._20_4_ = fVar666;
          auVar691._16_4_ = fVar666;
          auVar691._24_4_ = fVar666;
          auVar691._28_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 2];
          auVar691._4_4_ = fVar666;
          auVar691._0_4_ = fVar666;
          auVar691._8_4_ = fVar666;
          auVar691._12_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 1];
          fVar667 = ptr1[uVar279];
          auVar1594 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar691,1);
          auVar1594 = vmulps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
          fVar666 = ptr1[uVar279 + 1];
          fVar667 = ptr1[uVar279];
          fVar1604 = *(float *)(*(undefined1 (*) [64])ptr + 4);
          fVar730 = *(float *)(*(undefined1 (*) [64])ptr + 8);
          fVar233 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          fVar234 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          fVar729 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          fVar235 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          *(float *)*(undefined1 (*) [64])outptr = fVar667 * *(float *)*(undefined1 (*) [64])ptr;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar667 * fVar1604;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar667 * fVar730;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar667 * fVar233;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar666 * fVar234;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar666 * fVar729;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar666 * fVar235;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar666;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        lVar280 = 0;
        for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
            uVar283 = (ulong)((int)uVar283 + 1)) {
          fVar666 = *(float *)((long)ptr1 + uVar279 * 4 + lVar280);
          pfVar1599 = (float *)(*(undefined1 (*) [64])ptr + lVar280 * 4);
          fVar667 = pfVar1599[1];
          fVar1604 = pfVar1599[2];
          fVar730 = pfVar1599[3];
          pfVar1601 = (float *)((long)*(undefined1 (*) [64])outptr + lVar280 * 4);
          *pfVar1601 = fVar666 * *pfVar1599;
          pfVar1601[1] = fVar666 * fVar667;
          pfVar1601[2] = fVar666 * fVar1604;
          pfVar1601[3] = fVar666 * fVar730;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (bw == 1) {
        auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        for (iVar278 = 0xf; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
          in_ZMM1 = vmulps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = in_ZMM1;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        fVar666 = *ptr1;
        for (iVar278 = iVar278 + -0xc; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
          auVar812._0_4_ = fVar666 * *(float *)*(undefined1 (*) [64])ptr;
          auVar812._4_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar812._8_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar812._12_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar812._16_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          auVar812._20_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          auVar812._28_36_ = in_ZMM1._28_36_;
          auVar812._24_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          in_ZMM1 = ZEXT3264(auVar812._0_32_);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar812._0_32_;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        fVar666 = *ptr1;
        lVar280 = 0;
        for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
          pfVar1599 = (float *)(*(undefined1 (*) [64])ptr + lVar280 * 4);
          fVar667 = pfVar1599[1];
          fVar1604 = pfVar1599[2];
          fVar730 = pfVar1599[3];
          pfVar1601 = (float *)((long)*(undefined1 (*) [64])outptr + lVar280 * 4);
          *pfVar1601 = fVar666 * *pfVar1599;
          pfVar1601[1] = fVar666 * fVar667;
          pfVar1601[2] = fVar666 * fVar1604;
          pfVar1601[3] = fVar666 * fVar730;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar276 == 0x10) {
        auVar1594 = *(undefined1 (*) [64])ptr;
        iVar277 = iVar278;
        while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
          fVar666 = *ptr1;
          auVar182._4_4_ = fVar666;
          auVar182._0_4_ = fVar666;
          auVar182._8_4_ = fVar666;
          auVar182._12_4_ = fVar666;
          auVar182._16_4_ = fVar666;
          auVar182._20_4_ = fVar666;
          auVar182._24_4_ = fVar666;
          auVar182._28_4_ = fVar666;
          auVar182._32_4_ = fVar666;
          auVar182._36_4_ = fVar666;
          auVar182._40_4_ = fVar666;
          auVar182._44_4_ = fVar666;
          auVar182._48_4_ = fVar666;
          auVar182._52_4_ = fVar666;
          auVar182._56_4_ = fVar666;
          auVar182._60_4_ = fVar666;
          auVar1595 = vmulps_avx512f(auVar1594,auVar182);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
        }
      }
      if (iVar276 == 8) {
        auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
          fVar666 = *ptr1;
          fVar667 = ptr1[1];
          auVar869._4_4_ = fVar667;
          auVar869._0_4_ = fVar667;
          auVar869._8_4_ = fVar667;
          auVar869._12_4_ = fVar667;
          auVar869._16_4_ = fVar667;
          auVar869._20_4_ = fVar667;
          auVar869._24_4_ = fVar667;
          auVar869._28_4_ = fVar667;
          auVar1595 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar869,
                                 1);
          auVar1595 = vmulps_avx512f(auVar1595,auVar1594);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          fVar666 = *ptr1;
          auVar174._4_4_ = fVar666;
          auVar174._0_4_ = fVar666;
          auVar174._8_4_ = fVar666;
          auVar174._12_4_ = fVar666;
          auVar174._16_4_ = fVar666;
          auVar174._20_4_ = fVar666;
          auVar174._24_4_ = fVar666;
          auVar174._28_4_ = fVar666;
          auVar411 = vmulps_avx512vl(auVar1594._0_32_,auVar174);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      if (iVar276 != 4) {
        return;
      }
      auVar1594 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar287 = auVar1594._0_16_;
      auVar350 = ZEXT116(0) * auVar287 + ZEXT116(1) * auVar287;
      auVar351 = ZEXT116(0) * auVar1594._16_16_ + ZEXT116(1) * auVar287;
      for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
        fVar666 = ptr1[uVar279 + 3];
        auVar870._20_4_ = fVar666;
        auVar870._16_4_ = fVar666;
        auVar870._24_4_ = fVar666;
        auVar870._28_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 2];
        auVar870._4_4_ = fVar666;
        auVar870._0_4_ = fVar666;
        auVar870._8_4_ = fVar666;
        auVar870._12_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        auVar1595 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar870,1);
        auVar1595 = vmulps_avx512f(auVar1595,auVar1594);
        *(undefined1 (*) [64])outptr = auVar1595;
        outptr = (float *)((long)outptr + 0x40);
      }
      for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        *(float *)*(undefined1 (*) [64])outptr = fVar667 * auVar350._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar667 * auVar350._4_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar667 * auVar350._8_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar667 * auVar350._12_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar666 * auVar351._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar666 * auVar351._4_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar666 * auVar351._8_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar666;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
        auVar90._4_4_ = uVar1603;
        auVar90._0_4_ = uVar1603;
        auVar90._8_4_ = uVar1603;
        auVar90._12_4_ = uVar1603;
        auVar350 = vmulps_avx512vl(auVar287,auVar90);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar350;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw == bw) {
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1594 = vmulps_avx512f(*(undefined1 (*) [64])(ptr1 + uVar279),
                                   *(undefined1 (*) [64])(ptr + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1594;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        pfVar1599 = ptr1 + uVar279;
        fVar666 = pfVar1599[1];
        fVar667 = pfVar1599[2];
        fVar1604 = pfVar1599[3];
        fVar730 = pfVar1599[4];
        fVar233 = pfVar1599[5];
        fVar234 = pfVar1599[6];
        fVar729 = pfVar1599[7];
        pfVar1601 = ptr + uVar279;
        fVar235 = pfVar1601[1];
        fVar236 = pfVar1601[2];
        fVar237 = pfVar1601[3];
        fVar238 = pfVar1601[4];
        fVar239 = pfVar1601[5];
        fVar240 = pfVar1601[6];
        pfVar9 = outptr + uVar279;
        *pfVar9 = *pfVar1599 * *pfVar1601;
        pfVar9[1] = fVar666 * fVar235;
        pfVar9[2] = fVar667 * fVar236;
        pfVar9[3] = fVar1604 * fVar237;
        pfVar9[4] = fVar730 * fVar238;
        pfVar9[5] = fVar233 * fVar239;
        pfVar9[6] = fVar234 * fVar240;
        pfVar9[7] = fVar729;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        pfVar1599 = ptr1 + uVar279;
        fVar666 = pfVar1599[1];
        fVar667 = pfVar1599[2];
        fVar1604 = pfVar1599[3];
        pfVar1601 = ptr + uVar279;
        fVar730 = pfVar1601[1];
        fVar233 = pfVar1601[2];
        fVar234 = pfVar1601[3];
        pfVar9 = outptr + uVar279;
        *pfVar9 = *pfVar1599 * *pfVar1601;
        pfVar9[1] = fVar666 * fVar730;
        pfVar9[2] = fVar667 * fVar233;
        pfVar9[3] = fVar1604 * fVar234;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        *(float *)((long)outptr + uVar279 * 4 + lVar280) =
             *(float *)((long)ptr1 + uVar279 * 4 + lVar280) *
             *(float *)((long)ptr + uVar279 * 4 + lVar280);
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_0038115e;
      fVar666 = *ptr;
      if (iVar276 == 4) {
        auVar752 = *(undefined1 (*) [16])ptr;
        auVar1594 = ZEXT3264(CONCAT1616(auVar752,auVar752));
      }
      else {
        auVar752._4_4_ = fVar666;
        auVar752._0_4_ = fVar666;
        auVar752._8_4_ = fVar666;
        auVar752._12_4_ = fVar666;
        if (iVar276 == 8) {
          auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar847._4_4_ = fVar666;
          auVar847._0_4_ = fVar666;
          auVar847._8_4_ = fVar666;
          auVar847._12_4_ = fVar666;
          auVar847._16_4_ = fVar666;
          auVar847._20_4_ = fVar666;
          auVar847._24_4_ = fVar666;
          auVar1594 = ZEXT3264(CONCAT428(fVar666,auVar847));
          if (iVar276 == 0x10) {
            auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_0038b49c;
          }
        }
      }
      auVar847 = auVar1594._0_28_;
      auVar1594 = vinserti64x4_avx512f(auVar1594,auVar1594._0_32_,1);
LAB_0038b49c:
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1595 = vmulps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr1 + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        pfVar1599 = ptr1 + uVar279;
        auVar961._0_4_ = auVar847._0_4_ * *pfVar1599;
        auVar961._4_4_ = auVar847._4_4_ * pfVar1599[1];
        auVar961._8_4_ = auVar847._8_4_ * pfVar1599[2];
        auVar961._12_4_ = auVar847._12_4_ * pfVar1599[3];
        auVar961._16_4_ = auVar847._16_4_ * pfVar1599[4];
        auVar961._20_4_ = auVar847._20_4_ * pfVar1599[5];
        auVar961._28_36_ = auVar1594._28_36_;
        auVar961._24_4_ = auVar847._24_4_ * pfVar1599[6];
        auVar1594 = ZEXT3264(auVar961._0_32_);
        *(undefined1 (*) [32])(outptr + uVar279) = auVar961._0_32_;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        pfVar1599 = ptr1 + uVar279;
        fVar667 = pfVar1599[1];
        fVar1604 = pfVar1599[2];
        fVar730 = pfVar1599[3];
        pfVar1601 = outptr + uVar279;
        *pfVar1601 = auVar752._0_4_ * *pfVar1599;
        pfVar1601[1] = auVar752._4_4_ * fVar667;
        pfVar1601[2] = auVar752._8_4_ * fVar1604;
        pfVar1601[3] = auVar752._12_4_ * fVar730;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        *(float *)((long)outptr + uVar279 * 4 + lVar280) =
             fVar666 * *(float *)((long)ptr1 + uVar279 * 4 + lVar280);
        lVar280 = lVar280 + 4;
      }
      return;
    }
    fVar666 = *ptr1;
    if (iVar276 == 4) {
      auVar741 = *(undefined1 (*) [16])ptr1;
      auVar1594 = ZEXT3264(CONCAT1616(auVar741,auVar741));
    }
    else {
      auVar741._4_4_ = fVar666;
      auVar741._0_4_ = fVar666;
      auVar741._8_4_ = fVar666;
      auVar741._12_4_ = fVar666;
      if (iVar276 == 8) {
        auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar846._4_4_ = fVar666;
        auVar846._0_4_ = fVar666;
        auVar846._8_4_ = fVar666;
        auVar846._12_4_ = fVar666;
        auVar846._16_4_ = fVar666;
        auVar846._20_4_ = fVar666;
        auVar846._24_4_ = fVar666;
        auVar1594 = ZEXT3264(CONCAT428(fVar666,auVar846));
        if (iVar276 == 0x10) {
          auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_0038777b;
        }
      }
    }
    auVar846 = auVar1594._0_28_;
    auVar1594 = vinserti64x4_avx512f(auVar1594,auVar1594._0_32_,1);
LAB_0038777b:
    for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar1595 = vmulps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr + uVar279));
      *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
    }
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      pfVar1599 = ptr + uVar279;
      auVar960._0_4_ = auVar846._0_4_ * *pfVar1599;
      auVar960._4_4_ = auVar846._4_4_ * pfVar1599[1];
      auVar960._8_4_ = auVar846._8_4_ * pfVar1599[2];
      auVar960._12_4_ = auVar846._12_4_ * pfVar1599[3];
      auVar960._16_4_ = auVar846._16_4_ * pfVar1599[4];
      auVar960._20_4_ = auVar846._20_4_ * pfVar1599[5];
      auVar960._28_36_ = auVar1594._28_36_;
      auVar960._24_4_ = auVar846._24_4_ * pfVar1599[6];
      auVar1594 = ZEXT3264(auVar960._0_32_);
      *(undefined1 (*) [32])(outptr + uVar279) = auVar960._0_32_;
    }
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      pfVar1599 = ptr + uVar279;
      fVar667 = pfVar1599[1];
      fVar1604 = pfVar1599[2];
      fVar730 = pfVar1599[3];
      pfVar1601 = outptr + uVar279;
      *pfVar1601 = auVar741._0_4_ * *pfVar1599;
      pfVar1601[1] = auVar741._4_4_ * fVar667;
      pfVar1601[2] = auVar741._8_4_ * fVar1604;
      pfVar1601[3] = auVar741._12_4_ * fVar730;
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      *(float *)((long)outptr + uVar279 * 4 + lVar280) =
           fVar666 * *(float *)((long)ptr + uVar279 * 4 + lVar280);
      lVar280 = lVar280 + 4;
    }
    return;
  case 3:
    iVar278 = bw;
    if (bw < aw) {
      iVar278 = aw;
    }
    iVar276 = bp;
    if (bp < ap) {
      iVar276 = ap;
    }
    iVar277 = iVar276 * iVar278;
    if (ap != bp) {
LAB_00381304:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (iVar276 == 0x10) {
          iVar277 = 0;
          if (0 < iVar278) {
            iVar277 = iVar278;
          }
          while (iVar277 != 0) {
            auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *ptr1)));
            auVar1594 = vmulps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            iVar277 = iVar277 + -1;
          }
        }
        if (iVar276 == 8) {
          for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
            fVar666 = *ptr1;
            fVar667 = ptr1[1];
            auVar851._4_4_ = fVar667;
            auVar851._0_4_ = fVar667;
            auVar851._8_4_ = fVar667;
            auVar851._12_4_ = fVar667;
            auVar851._16_4_ = fVar667;
            auVar851._20_4_ = fVar667;
            auVar851._24_4_ = fVar667;
            auVar851._28_4_ = fVar667;
            auVar1594 = vinsertf64x4_avx512f
                                  (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar851,
                                   1);
            auVar1594 = vdivps_avx512f(*(undefined1 (*) [64])ptr,auVar1594);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
          }
          for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
            fVar729 = 1.0 / *ptr1;
            fVar666 = *(float *)(*(undefined1 (*) [64])ptr + 4);
            fVar667 = *(float *)(*(undefined1 (*) [64])ptr + 8);
            fVar1604 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            fVar730 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            fVar233 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            fVar234 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            *(float *)*(undefined1 (*) [64])outptr = fVar729 * *(float *)*(undefined1 (*) [64])ptr;
            *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar729 * fVar666;
            *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar729 * fVar667;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar729 * fVar1604;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar729 * fVar730;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar729 * fVar233;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar729 * fVar234;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar729;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          }
        }
        if (iVar276 != 4) {
          return;
        }
        for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
          fVar666 = ptr1[uVar279 + 3];
          auVar787._20_4_ = fVar666;
          auVar787._16_4_ = fVar666;
          auVar787._24_4_ = fVar666;
          auVar787._28_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 2];
          auVar787._4_4_ = fVar666;
          auVar787._0_4_ = fVar666;
          auVar787._8_4_ = fVar666;
          auVar787._12_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 1];
          fVar667 = ptr1[uVar279];
          auVar1594 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar787,1);
          auVar1594 = vdivps_avx512f(*(undefined1 (*) [64])ptr,auVar1594);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
          fVar666 = ptr1[uVar279 + 1];
          auVar788._20_4_ = fVar666;
          auVar788._16_4_ = fVar666;
          auVar788._24_4_ = fVar666;
          auVar788._28_4_ = fVar666;
          fVar666 = ptr1[uVar279];
          auVar788._4_4_ = fVar666;
          auVar788._0_4_ = fVar666;
          auVar788._8_4_ = fVar666;
          auVar788._12_4_ = fVar666;
          auVar411 = vdivps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar788);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        lVar280 = 0;
        for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
            uVar283 = (ulong)((int)uVar283 + 1)) {
          fVar730 = 1.0 / *(float *)((long)ptr1 + uVar279 * 4 + lVar280);
          pfVar1599 = (float *)(*(undefined1 (*) [64])ptr + lVar280 * 4);
          fVar666 = pfVar1599[1];
          fVar667 = pfVar1599[2];
          fVar1604 = pfVar1599[3];
          pfVar1601 = (float *)((long)*(undefined1 (*) [64])outptr + lVar280 * 4);
          *pfVar1601 = fVar730 * *pfVar1599;
          pfVar1601[1] = fVar730 * fVar666;
          pfVar1601[2] = fVar730 * fVar667;
          pfVar1601[3] = fVar730 * fVar1604;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (bw == 1) {
        auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *ptr1)));
        for (iVar278 = 0xf; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
          in_ZMM2 = vmulps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = in_ZMM2;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        fVar666 = 1.0 / *ptr1;
        for (iVar278 = iVar278 + -0xc; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
          auVar908._0_4_ = fVar666 * *(float *)*(undefined1 (*) [64])ptr;
          auVar908._4_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar908._8_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar908._12_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar908._16_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          auVar908._20_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          auVar908._28_36_ = in_ZMM2._28_36_;
          auVar908._24_4_ = fVar666 * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          in_ZMM2 = ZEXT3264(auVar908._0_32_);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar908._0_32_;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        fVar666 = 1.0 / *ptr1;
        lVar280 = 0;
        for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
          pfVar1599 = (float *)(*(undefined1 (*) [64])ptr + lVar280 * 4);
          fVar667 = pfVar1599[1];
          fVar1604 = pfVar1599[2];
          fVar730 = pfVar1599[3];
          pfVar1601 = (float *)((long)*(undefined1 (*) [64])outptr + lVar280 * 4);
          *pfVar1601 = fVar666 * *pfVar1599;
          pfVar1601[1] = fVar666 * fVar667;
          pfVar1601[2] = fVar666 * fVar1604;
          pfVar1601[3] = fVar666 * fVar730;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar276 == 0x10) {
        auVar1594 = *(undefined1 (*) [64])ptr;
        iVar277 = iVar278;
        while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
          auVar1595 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *ptr1)));
          auVar1595 = vmulps_avx512f(auVar1594,auVar1595);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
        }
      }
      if (iVar276 == 8) {
        auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
          fVar666 = *ptr1;
          fVar667 = ptr1[1];
          auVar871._4_4_ = fVar667;
          auVar871._0_4_ = fVar667;
          auVar871._8_4_ = fVar667;
          auVar871._12_4_ = fVar667;
          auVar871._16_4_ = fVar667;
          auVar871._20_4_ = fVar667;
          auVar871._24_4_ = fVar667;
          auVar871._28_4_ = fVar667;
          auVar1595 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar871,
                                 1);
          auVar1595 = vdivps_avx512f(auVar1594,auVar1595);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          fVar666 = 1.0 / *ptr1;
          *(float *)*(undefined1 (*) [64])outptr = auVar1594._0_4_ * fVar666;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar1594._4_4_ * fVar666;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar1594._8_4_ * fVar666;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar1594._12_4_ * fVar666;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar1594._16_4_ * fVar666;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar1594._20_4_ * fVar666;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar1594._24_4_ * fVar666;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar666;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      if (iVar276 != 4) {
        return;
      }
      auVar1594 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar287 = auVar1594._0_16_;
      auVar805._0_16_ = ZEXT116(0) * auVar287 + ZEXT116(1) * auVar287;
      auVar805._16_16_ = ZEXT116(0) * auVar1594._16_16_ + ZEXT116(1) * auVar287;
      for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
        fVar666 = ptr1[uVar279 + 3];
        auVar894._20_4_ = fVar666;
        auVar894._16_4_ = fVar666;
        auVar894._24_4_ = fVar666;
        auVar894._28_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 2];
        auVar894._4_4_ = fVar666;
        auVar894._0_4_ = fVar666;
        auVar894._8_4_ = fVar666;
        auVar894._12_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        auVar1595 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar894,1);
        auVar1595 = vdivps_avx512f(auVar1594,auVar1595);
        *(undefined1 (*) [64])outptr = auVar1595;
        outptr = (float *)((long)outptr + 0x40);
      }
      for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
        fVar666 = ptr1[uVar279 + 1];
        auVar895._20_4_ = fVar666;
        auVar895._16_4_ = fVar666;
        auVar895._24_4_ = fVar666;
        auVar895._28_4_ = fVar666;
        fVar666 = ptr1[uVar279];
        auVar895._4_4_ = fVar666;
        auVar895._0_4_ = fVar666;
        auVar895._8_4_ = fVar666;
        auVar895._12_4_ = fVar666;
        auVar411 = vdivps_avx(auVar805,auVar895);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        fVar666 = 1.0 / *(float *)((long)ptr1 + uVar279 * 4 + lVar280);
        pfVar1599 = (float *)((long)*(undefined1 (*) [64])outptr + lVar280 * 4);
        *pfVar1599 = auVar1594._0_4_ * fVar666;
        pfVar1599[1] = auVar1594._4_4_ * fVar666;
        pfVar1599[2] = auVar1594._8_4_ * fVar666;
        pfVar1599[3] = auVar1594._12_4_ * fVar666;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw == bw) {
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1594 = vdivps_avx512f(*(undefined1 (*) [64])(ptr + uVar279),
                                   *(undefined1 (*) [64])(ptr1 + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1594;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = vdivps_avx(*(undefined1 (*) [32])(ptr + uVar279),
                              *(undefined1 (*) [32])(ptr1 + uVar279));
        *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar287 = vdivps_avx(*(undefined1 (*) [16])(ptr + uVar279),
                              *(undefined1 (*) [16])(ptr1 + uVar279));
        *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        *(float *)((long)outptr + uVar279 * 4 + lVar280) =
             *(float *)((long)ptr + uVar279 * 4 + lVar280) /
             *(float *)((long)ptr1 + uVar279 * 4 + lVar280);
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_00381304;
      fVar666 = *ptr;
      if (iVar276 == 4) {
        auVar753 = *(undefined1 (*) [16])ptr;
        auVar1594 = ZEXT3264(CONCAT1616(auVar753,auVar753));
      }
      else {
        auVar753._4_4_ = fVar666;
        auVar753._0_4_ = fVar666;
        auVar753._8_4_ = fVar666;
        auVar753._12_4_ = fVar666;
        if (iVar276 == 8) {
          auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar902._4_4_ = fVar666;
          auVar902._0_4_ = fVar666;
          auVar902._8_4_ = fVar666;
          auVar902._12_4_ = fVar666;
          auVar902._16_4_ = fVar666;
          auVar902._20_4_ = fVar666;
          auVar902._24_4_ = fVar666;
          auVar902._28_4_ = fVar666;
          auVar1594 = ZEXT3264(auVar902);
          if (iVar276 == 0x10) {
            auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_0038b528;
          }
        }
      }
      auVar902 = auVar1594._0_32_;
      auVar1594 = vinserti64x4_avx512f(auVar1594,auVar902,1);
LAB_0038b528:
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1595 = vdivps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr1 + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = vdivps_avx(auVar902,*(undefined1 (*) [32])(ptr1 + uVar279));
        *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar287 = vdivps_avx(auVar753,*(undefined1 (*) [16])(ptr1 + uVar279));
        *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        *(float *)((long)outptr + uVar279 * 4 + lVar280) =
             fVar666 / *(float *)((long)ptr1 + uVar279 * 4 + lVar280);
        lVar280 = lVar280 + 4;
      }
      return;
    }
    fVar666 = *ptr1;
    if (iVar276 == 4) {
      auVar742 = *(undefined1 (*) [16])ptr1;
      auVar1594 = ZEXT3264(CONCAT1616(auVar742,auVar742));
    }
    else {
      auVar742._4_4_ = fVar666;
      auVar742._0_4_ = fVar666;
      auVar742._8_4_ = fVar666;
      auVar742._12_4_ = fVar666;
      if (iVar276 == 8) {
        auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar884._4_4_ = fVar666;
        auVar884._0_4_ = fVar666;
        auVar884._8_4_ = fVar666;
        auVar884._12_4_ = fVar666;
        auVar884._16_4_ = fVar666;
        auVar884._20_4_ = fVar666;
        auVar884._24_4_ = fVar666;
        auVar884._28_4_ = fVar666;
        auVar1594 = ZEXT3264(auVar884);
        if (iVar276 == 0x10) {
          auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_0038781f;
        }
      }
    }
    auVar884 = auVar1594._0_32_;
    auVar1594 = vinserti64x4_avx512f(auVar1594,auVar884,1);
LAB_0038781f:
    auVar1595 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar1594 = vdivps_avx512f(auVar1595,auVar1594);
    for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar1595 = vmulps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr + uVar279));
      *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
    }
    auVar946._8_4_ = 0x3f800000;
    auVar946._0_8_ = 0x3f8000003f800000;
    auVar946._12_4_ = 0x3f800000;
    auVar946._16_4_ = 0x3f800000;
    auVar946._20_4_ = 0x3f800000;
    auVar946._24_4_ = 0x3f800000;
    auVar946._28_4_ = 0x3f800000;
    auVar411 = vdivps_avx(auVar946,auVar884);
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      pfVar1599 = ptr + uVar279;
      auVar231._4_4_ = auVar411._4_4_ * pfVar1599[1];
      auVar231._0_4_ = auVar411._0_4_ * *pfVar1599;
      auVar231._8_4_ = auVar411._8_4_ * pfVar1599[2];
      auVar231._12_4_ = auVar411._12_4_ * pfVar1599[3];
      auVar231._16_4_ = auVar411._16_4_ * pfVar1599[4];
      auVar231._20_4_ = auVar411._20_4_ * pfVar1599[5];
      auVar231._24_4_ = auVar411._24_4_ * pfVar1599[6];
      auVar231._28_4_ = auVar946._28_4_;
      *(undefined1 (*) [32])(outptr + uVar279) = auVar231;
      auVar946 = auVar231;
    }
    auVar833._8_4_ = 0x3f800000;
    auVar833._0_8_ = 0x3f8000003f800000;
    auVar833._12_4_ = 0x3f800000;
    auVar287 = vdivps_avx(auVar833,auVar742);
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      pfVar1599 = ptr + uVar279;
      fVar667 = pfVar1599[1];
      fVar1604 = pfVar1599[2];
      fVar730 = pfVar1599[3];
      pfVar1601 = outptr + uVar279;
      *pfVar1601 = auVar287._0_4_ * *pfVar1599;
      pfVar1601[1] = auVar287._4_4_ * fVar667;
      pfVar1601[2] = auVar287._8_4_ * fVar1604;
      pfVar1601[3] = auVar287._12_4_ * fVar730;
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      *(float *)((long)outptr + uVar279 * 4 + lVar280) =
           (1.0 / fVar666) * *(float *)((long)ptr + uVar279 * 4 + lVar280);
      lVar280 = lVar280 + 4;
    }
    return;
  case 4:
    iVar278 = bw;
    if (bw < aw) {
      iVar278 = aw;
    }
    iVar276 = bp;
    if (bp < ap) {
      iVar276 = ap;
    }
    iVar277 = iVar276 * iVar278;
    if (ap != bp) {
LAB_00380809:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (iVar276 == 0x10) {
          iVar277 = 0;
          if (0 < iVar278) {
            iVar277 = iVar278;
          }
          while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
            fVar666 = *ptr1;
            auVar180._4_4_ = fVar666;
            auVar180._0_4_ = fVar666;
            auVar180._8_4_ = fVar666;
            auVar180._12_4_ = fVar666;
            auVar180._16_4_ = fVar666;
            auVar180._20_4_ = fVar666;
            auVar180._24_4_ = fVar666;
            auVar180._28_4_ = fVar666;
            auVar180._32_4_ = fVar666;
            auVar180._36_4_ = fVar666;
            auVar180._40_4_ = fVar666;
            auVar180._44_4_ = fVar666;
            auVar180._48_4_ = fVar666;
            auVar180._52_4_ = fVar666;
            auVar180._56_4_ = fVar666;
            auVar180._60_4_ = fVar666;
            auVar1594 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,auVar180);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
          }
        }
        if (iVar276 == 8) {
          for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
            fVar666 = *ptr1;
            fVar667 = ptr1[1];
            auVar775._4_4_ = fVar667;
            auVar775._0_4_ = fVar667;
            auVar775._8_4_ = fVar667;
            auVar775._12_4_ = fVar667;
            auVar775._16_4_ = fVar667;
            auVar775._20_4_ = fVar667;
            auVar775._24_4_ = fVar667;
            auVar775._28_4_ = fVar667;
            auVar1594 = vinsertf64x4_avx512f
                                  (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar775,
                                   1);
            auVar1594 = vmaxps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
          }
          for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
            fVar666 = *ptr1;
            auVar172._4_4_ = fVar666;
            auVar172._0_4_ = fVar666;
            auVar172._8_4_ = fVar666;
            auVar172._12_4_ = fVar666;
            auVar172._16_4_ = fVar666;
            auVar172._20_4_ = fVar666;
            auVar172._24_4_ = fVar666;
            auVar172._28_4_ = fVar666;
            auVar411 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar172);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          }
        }
        if (iVar276 != 4) {
          return;
        }
        for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
          fVar666 = ptr1[uVar279 + 3];
          auVar689._20_4_ = fVar666;
          auVar689._16_4_ = fVar666;
          auVar689._24_4_ = fVar666;
          auVar689._28_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 2];
          auVar689._4_4_ = fVar666;
          auVar689._0_4_ = fVar666;
          auVar689._8_4_ = fVar666;
          auVar689._12_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 1];
          fVar667 = ptr1[uVar279];
          auVar1594 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar689,1);
          auVar1594 = vmaxps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
          fVar666 = ptr1[uVar279 + 1];
          auVar690._20_4_ = fVar666;
          auVar690._16_4_ = fVar666;
          auVar690._24_4_ = fVar666;
          auVar690._28_4_ = fVar666;
          fVar666 = ptr1[uVar279];
          auVar690._4_4_ = fVar666;
          auVar690._0_4_ = fVar666;
          auVar690._8_4_ = fVar666;
          auVar690._12_4_ = fVar666;
          auVar411 = vmaxps_avx(auVar690,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        lVar280 = 0;
        for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
            uVar283 = (ulong)((int)uVar283 + 1)) {
          uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
          auVar88._4_4_ = uVar1603;
          auVar88._0_4_ = uVar1603;
          auVar88._8_4_ = uVar1603;
          auVar88._12_4_ = uVar1603;
          auVar287 = vmaxps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar280 * 4)
                                     ,auVar88);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar287;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (bw == 1) {
        auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        for (iVar278 = 0xf; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
          auVar1595 = vmaxps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        fVar666 = *ptr1;
        auVar704._4_4_ = fVar666;
        auVar704._0_4_ = fVar666;
        auVar704._8_4_ = fVar666;
        auVar704._12_4_ = fVar666;
        auVar704._16_4_ = fVar666;
        auVar704._20_4_ = fVar666;
        auVar704._24_4_ = fVar666;
        auVar704._28_4_ = fVar666;
        for (iVar278 = iVar278 + -0xc; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
          auVar411 = vmaxps_avx(auVar704,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        fVar666 = *ptr1;
        auVar674._4_4_ = fVar666;
        auVar674._0_4_ = fVar666;
        auVar674._8_4_ = fVar666;
        auVar674._12_4_ = fVar666;
        lVar280 = 0;
        for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
          auVar287 = vmaxps_avx(auVar674,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar280 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar287;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar276 == 0x10) {
        auVar1594 = *(undefined1 (*) [64])ptr;
        iVar277 = iVar278;
        while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
          fVar666 = *ptr1;
          auVar181._4_4_ = fVar666;
          auVar181._0_4_ = fVar666;
          auVar181._8_4_ = fVar666;
          auVar181._12_4_ = fVar666;
          auVar181._16_4_ = fVar666;
          auVar181._20_4_ = fVar666;
          auVar181._24_4_ = fVar666;
          auVar181._28_4_ = fVar666;
          auVar181._32_4_ = fVar666;
          auVar181._36_4_ = fVar666;
          auVar181._40_4_ = fVar666;
          auVar181._44_4_ = fVar666;
          auVar181._48_4_ = fVar666;
          auVar181._52_4_ = fVar666;
          auVar181._56_4_ = fVar666;
          auVar181._60_4_ = fVar666;
          auVar1595 = vmaxps_avx512f(auVar1594,auVar181);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
        }
      }
      if (iVar276 == 8) {
        auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
          fVar666 = *ptr1;
          fVar667 = ptr1[1];
          auVar865._4_4_ = fVar667;
          auVar865._0_4_ = fVar667;
          auVar865._8_4_ = fVar667;
          auVar865._12_4_ = fVar667;
          auVar865._16_4_ = fVar667;
          auVar865._20_4_ = fVar667;
          auVar865._24_4_ = fVar667;
          auVar865._28_4_ = fVar667;
          auVar1595 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar865,
                                 1);
          auVar1595 = vmaxps_avx512f(auVar1594,auVar1595);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          fVar666 = *ptr1;
          auVar173._4_4_ = fVar666;
          auVar173._0_4_ = fVar666;
          auVar173._8_4_ = fVar666;
          auVar173._12_4_ = fVar666;
          auVar173._16_4_ = fVar666;
          auVar173._20_4_ = fVar666;
          auVar173._24_4_ = fVar666;
          auVar173._28_4_ = fVar666;
          auVar411 = vmaxps_avx512vl(auVar1594._0_32_,auVar173);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      if (iVar276 != 4) {
        return;
      }
      auVar1594 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar287 = auVar1594._0_16_;
      auVar796._0_16_ = ZEXT116(0) * auVar287 + ZEXT116(1) * auVar287;
      auVar796._16_16_ = ZEXT116(0) * auVar1594._16_16_ + ZEXT116(1) * auVar287;
      for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
        fVar666 = ptr1[uVar279 + 3];
        auVar866._20_4_ = fVar666;
        auVar866._16_4_ = fVar666;
        auVar866._24_4_ = fVar666;
        auVar866._28_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 2];
        auVar866._4_4_ = fVar666;
        auVar866._0_4_ = fVar666;
        auVar866._8_4_ = fVar666;
        auVar866._12_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        auVar1595 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar866,1);
        auVar1595 = vmaxps_avx512f(auVar1594,auVar1595);
        *(undefined1 (*) [64])outptr = auVar1595;
        outptr = (float *)((long)outptr + 0x40);
      }
      for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
        fVar666 = ptr1[uVar279 + 1];
        auVar867._20_4_ = fVar666;
        auVar867._16_4_ = fVar666;
        auVar867._24_4_ = fVar666;
        auVar867._28_4_ = fVar666;
        fVar666 = ptr1[uVar279];
        auVar867._4_4_ = fVar666;
        auVar867._0_4_ = fVar666;
        auVar867._8_4_ = fVar666;
        auVar867._12_4_ = fVar666;
        auVar411 = vmaxps_avx(auVar796,auVar867);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
        auVar89._4_4_ = uVar1603;
        auVar89._0_4_ = uVar1603;
        auVar89._8_4_ = uVar1603;
        auVar89._12_4_ = uVar1603;
        auVar350 = vmaxps_avx512vl(auVar287,auVar89);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar350;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw == bw) {
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1594 = vmaxps_avx512f(*(undefined1 (*) [64])(ptr + uVar279),
                                   *(undefined1 (*) [64])(ptr1 + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1594;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = vmaxps_avx(*(undefined1 (*) [32])(ptr + uVar279),
                              *(undefined1 (*) [32])(ptr1 + uVar279));
        *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar287 = vmaxps_avx(*(undefined1 (*) [16])(ptr + uVar279),
                              *(undefined1 (*) [16])(ptr1 + uVar279));
        *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        auVar287 = vmaxss_avx(ZEXT416(*(uint *)((long)ptr1 + uVar279 * 4 + lVar280)),
                              ZEXT416(*(uint *)((long)ptr + uVar279 * 4 + lVar280)));
        *(int *)((long)outptr + uVar279 * 4 + lVar280) = auVar287._0_4_;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_00380809;
      fVar666 = *ptr;
      if (iVar276 == 4) {
        auVar749 = *(undefined1 (*) [16])ptr;
        auVar1594 = ZEXT3264(CONCAT1616(auVar749,auVar749));
      }
      else {
        auVar749._4_4_ = fVar666;
        auVar749._0_4_ = fVar666;
        auVar749._8_4_ = fVar666;
        auVar749._12_4_ = fVar666;
        if (iVar276 == 8) {
          auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar899._4_4_ = fVar666;
          auVar899._0_4_ = fVar666;
          auVar899._8_4_ = fVar666;
          auVar899._12_4_ = fVar666;
          auVar899._16_4_ = fVar666;
          auVar899._20_4_ = fVar666;
          auVar899._24_4_ = fVar666;
          auVar899._28_4_ = fVar666;
          auVar1594 = ZEXT3264(auVar899);
          if (iVar276 == 0x10) {
            auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_0038ac94;
          }
        }
      }
      auVar899 = auVar1594._0_32_;
      auVar1594 = vinserti64x4_avx512f(auVar1594,auVar899,1);
LAB_0038ac94:
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1595 = vmaxps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr1 + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = vmaxps_avx(auVar899,*(undefined1 (*) [32])(ptr1 + uVar279));
        *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar287 = vmaxps_avx(auVar749,*(undefined1 (*) [16])(ptr1 + uVar279));
        *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        auVar287 = vmaxss_avx(ZEXT416((uint)fVar666),
                              ZEXT416(*(uint *)((long)ptr1 + uVar279 * 4 + lVar280)));
        *(int *)((long)outptr + uVar279 * 4 + lVar280) = auVar287._0_4_;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    fVar666 = *ptr1;
    if (iVar276 == 4) {
      auVar740 = *(undefined1 (*) [16])ptr1;
      auVar1594 = ZEXT3264(CONCAT1616(auVar740,auVar740));
    }
    else {
      auVar740._4_4_ = fVar666;
      auVar740._0_4_ = fVar666;
      auVar740._8_4_ = fVar666;
      auVar740._12_4_ = fVar666;
      if (iVar276 == 8) {
        auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar883._4_4_ = fVar666;
        auVar883._0_4_ = fVar666;
        auVar883._8_4_ = fVar666;
        auVar883._12_4_ = fVar666;
        auVar883._16_4_ = fVar666;
        auVar883._20_4_ = fVar666;
        auVar883._24_4_ = fVar666;
        auVar883._28_4_ = fVar666;
        auVar1594 = ZEXT3264(auVar883);
        if (iVar276 == 0x10) {
          auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_00386f59;
        }
      }
    }
    auVar883 = auVar1594._0_32_;
    auVar1594 = vinserti64x4_avx512f(auVar1594,auVar883,1);
LAB_00386f59:
    for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar1595 = vmaxps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr + uVar279));
      *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
    }
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      auVar411 = vmaxps_avx(auVar883,*(undefined1 (*) [32])(ptr + uVar279));
      *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
    }
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      auVar287 = vmaxps_avx(auVar740,*(undefined1 (*) [16])(ptr + uVar279));
      *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      auVar287 = vmaxss_avx(ZEXT416((uint)fVar666),
                            ZEXT416(*(uint *)((long)ptr + uVar279 * 4 + lVar280)));
      *(int *)((long)outptr + uVar279 * 4 + lVar280) = auVar287._0_4_;
      lVar280 = lVar280 + 4;
    }
    return;
  case 5:
    iVar278 = bw;
    if (bw < aw) {
      iVar278 = aw;
    }
    iVar276 = bp;
    if (bp < ap) {
      iVar276 = ap;
    }
    iVar277 = iVar276 * iVar278;
    if (ap != bp) {
LAB_00381907:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (iVar276 == 0x10) {
          iVar277 = 0;
          if (0 < iVar278) {
            iVar277 = iVar278;
          }
          while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
            fVar666 = *ptr1;
            auVar179._4_4_ = fVar666;
            auVar179._0_4_ = fVar666;
            auVar179._8_4_ = fVar666;
            auVar179._12_4_ = fVar666;
            auVar179._16_4_ = fVar666;
            auVar179._20_4_ = fVar666;
            auVar179._24_4_ = fVar666;
            auVar179._28_4_ = fVar666;
            auVar179._32_4_ = fVar666;
            auVar179._36_4_ = fVar666;
            auVar179._40_4_ = fVar666;
            auVar179._44_4_ = fVar666;
            auVar179._48_4_ = fVar666;
            auVar179._52_4_ = fVar666;
            auVar179._56_4_ = fVar666;
            auVar179._60_4_ = fVar666;
            auVar1594 = vminps_avx512f(*(undefined1 (*) [64])ptr,auVar179);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
          }
        }
        if (iVar276 == 8) {
          for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
            fVar666 = *ptr1;
            fVar667 = ptr1[1];
            auVar781._4_4_ = fVar667;
            auVar781._0_4_ = fVar667;
            auVar781._8_4_ = fVar667;
            auVar781._12_4_ = fVar667;
            auVar781._16_4_ = fVar667;
            auVar781._20_4_ = fVar667;
            auVar781._24_4_ = fVar667;
            auVar781._28_4_ = fVar667;
            auVar1594 = vinsertf64x4_avx512f
                                  (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar781,
                                   1);
            auVar1594 = vminps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
          }
          for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
            fVar666 = *ptr1;
            auVar170._4_4_ = fVar666;
            auVar170._0_4_ = fVar666;
            auVar170._8_4_ = fVar666;
            auVar170._12_4_ = fVar666;
            auVar170._16_4_ = fVar666;
            auVar170._20_4_ = fVar666;
            auVar170._24_4_ = fVar666;
            auVar170._28_4_ = fVar666;
            auVar411 = vminps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar170);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          }
        }
        if (iVar276 != 4) {
          return;
        }
        for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
          fVar666 = ptr1[uVar279 + 3];
          auVar697._20_4_ = fVar666;
          auVar697._16_4_ = fVar666;
          auVar697._24_4_ = fVar666;
          auVar697._28_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 2];
          auVar697._4_4_ = fVar666;
          auVar697._0_4_ = fVar666;
          auVar697._8_4_ = fVar666;
          auVar697._12_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 1];
          fVar667 = ptr1[uVar279];
          auVar1594 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar697,1);
          auVar1594 = vminps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
          fVar666 = ptr1[uVar279 + 1];
          auVar698._20_4_ = fVar666;
          auVar698._16_4_ = fVar666;
          auVar698._24_4_ = fVar666;
          auVar698._28_4_ = fVar666;
          fVar666 = ptr1[uVar279];
          auVar698._4_4_ = fVar666;
          auVar698._0_4_ = fVar666;
          auVar698._8_4_ = fVar666;
          auVar698._12_4_ = fVar666;
          auVar411 = vminps_avx(auVar698,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        lVar280 = 0;
        for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
            uVar283 = (ulong)((int)uVar283 + 1)) {
          uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
          auVar86._4_4_ = uVar1603;
          auVar86._0_4_ = uVar1603;
          auVar86._8_4_ = uVar1603;
          auVar86._12_4_ = uVar1603;
          auVar287 = vminps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar280 * 4)
                                     ,auVar86);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar287;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (bw == 1) {
        auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        for (iVar278 = 0xf; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
          auVar1595 = vminps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        fVar666 = *ptr1;
        auVar708._4_4_ = fVar666;
        auVar708._0_4_ = fVar666;
        auVar708._8_4_ = fVar666;
        auVar708._12_4_ = fVar666;
        auVar708._16_4_ = fVar666;
        auVar708._20_4_ = fVar666;
        auVar708._24_4_ = fVar666;
        auVar708._28_4_ = fVar666;
        for (iVar278 = iVar278 + -0xc; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
          auVar411 = vminps_avx(auVar708,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        fVar666 = *ptr1;
        auVar678._4_4_ = fVar666;
        auVar678._0_4_ = fVar666;
        auVar678._8_4_ = fVar666;
        auVar678._12_4_ = fVar666;
        lVar280 = 0;
        for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
          auVar287 = vminps_avx(auVar678,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar280 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar287;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar276 == 0x10) {
        auVar1594 = *(undefined1 (*) [64])ptr;
        iVar277 = iVar278;
        while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
          fVar666 = *ptr1;
          auVar575._4_4_ = fVar666;
          auVar575._0_4_ = fVar666;
          auVar575._8_4_ = fVar666;
          auVar575._12_4_ = fVar666;
          auVar575._16_4_ = fVar666;
          auVar575._20_4_ = fVar666;
          auVar575._24_4_ = fVar666;
          auVar575._28_4_ = fVar666;
          auVar575._32_4_ = fVar666;
          auVar575._36_4_ = fVar666;
          auVar575._40_4_ = fVar666;
          auVar575._44_4_ = fVar666;
          auVar575._48_4_ = fVar666;
          auVar575._52_4_ = fVar666;
          auVar575._56_4_ = fVar666;
          auVar575._60_4_ = fVar666;
          auVar1595 = vminps_avx512f(auVar1594,auVar575);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
        }
      }
      if (iVar276 == 8) {
        auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
          fVar666 = *ptr1;
          fVar667 = ptr1[1];
          auVar880._4_4_ = fVar667;
          auVar880._0_4_ = fVar667;
          auVar880._8_4_ = fVar667;
          auVar880._12_4_ = fVar667;
          auVar880._16_4_ = fVar667;
          auVar880._20_4_ = fVar667;
          auVar880._24_4_ = fVar667;
          auVar880._28_4_ = fVar667;
          auVar1595 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar880,
                                 1);
          auVar1595 = vminps_avx512f(auVar1594,auVar1595);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          fVar666 = *ptr1;
          auVar171._4_4_ = fVar666;
          auVar171._0_4_ = fVar666;
          auVar171._8_4_ = fVar666;
          auVar171._12_4_ = fVar666;
          auVar171._16_4_ = fVar666;
          auVar171._20_4_ = fVar666;
          auVar171._24_4_ = fVar666;
          auVar171._28_4_ = fVar666;
          auVar411 = vminps_avx512vl(auVar1594._0_32_,auVar171);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      if (iVar276 != 4) {
        return;
      }
      auVar1594 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar287 = auVar1594._0_16_;
      auVar800._0_16_ = ZEXT116(0) * auVar287 + ZEXT116(1) * auVar287;
      auVar800._16_16_ = ZEXT116(0) * auVar1594._16_16_ + ZEXT116(1) * auVar287;
      for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
        fVar666 = ptr1[uVar279 + 3];
        auVar881._20_4_ = fVar666;
        auVar881._16_4_ = fVar666;
        auVar881._24_4_ = fVar666;
        auVar881._28_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 2];
        auVar881._4_4_ = fVar666;
        auVar881._0_4_ = fVar666;
        auVar881._8_4_ = fVar666;
        auVar881._12_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        auVar1595 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar881,1);
        auVar1595 = vminps_avx512f(auVar1594,auVar1595);
        *(undefined1 (*) [64])outptr = auVar1595;
        outptr = (float *)((long)outptr + 0x40);
      }
      for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
        fVar666 = ptr1[uVar279 + 1];
        auVar882._20_4_ = fVar666;
        auVar882._16_4_ = fVar666;
        auVar882._24_4_ = fVar666;
        auVar882._28_4_ = fVar666;
        fVar666 = ptr1[uVar279];
        auVar882._4_4_ = fVar666;
        auVar882._0_4_ = fVar666;
        auVar882._8_4_ = fVar666;
        auVar882._12_4_ = fVar666;
        auVar411 = vminps_avx(auVar800,auVar882);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
        auVar87._4_4_ = uVar1603;
        auVar87._0_4_ = uVar1603;
        auVar87._8_4_ = uVar1603;
        auVar87._12_4_ = uVar1603;
        auVar350 = vminps_avx512vl(auVar287,auVar87);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar350;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw == bw) {
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1594 = vminps_avx512f(*(undefined1 (*) [64])(ptr + uVar279),
                                   *(undefined1 (*) [64])(ptr1 + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1594;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = vminps_avx(*(undefined1 (*) [32])(ptr + uVar279),
                              *(undefined1 (*) [32])(ptr1 + uVar279));
        *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar287 = vminps_avx(*(undefined1 (*) [16])(ptr + uVar279),
                              *(undefined1 (*) [16])(ptr1 + uVar279));
        *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        auVar287 = vminss_avx(ZEXT416(*(uint *)((long)ptr1 + uVar279 * 4 + lVar280)),
                              ZEXT416(*(uint *)((long)ptr + uVar279 * 4 + lVar280)));
        *(int *)((long)outptr + uVar279 * 4 + lVar280) = auVar287._0_4_;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_00381907;
      fVar666 = *ptr;
      if (iVar276 == 4) {
        auVar757 = *(undefined1 (*) [16])ptr;
        auVar1594 = ZEXT3264(CONCAT1616(auVar757,auVar757));
      }
      else {
        auVar757._4_4_ = fVar666;
        auVar757._0_4_ = fVar666;
        auVar757._8_4_ = fVar666;
        auVar757._12_4_ = fVar666;
        if (iVar276 == 8) {
          auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar906._4_4_ = fVar666;
          auVar906._0_4_ = fVar666;
          auVar906._8_4_ = fVar666;
          auVar906._12_4_ = fVar666;
          auVar906._16_4_ = fVar666;
          auVar906._20_4_ = fVar666;
          auVar906._24_4_ = fVar666;
          auVar906._28_4_ = fVar666;
          auVar1594 = ZEXT3264(auVar906);
          if (iVar276 == 0x10) {
            auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_0038b76b;
          }
        }
      }
      auVar906 = auVar1594._0_32_;
      auVar1594 = vinserti64x4_avx512f(auVar1594,auVar906,1);
LAB_0038b76b:
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1595 = vminps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr1 + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = vminps_avx(auVar906,*(undefined1 (*) [32])(ptr1 + uVar279));
        *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar287 = vminps_avx(auVar757,*(undefined1 (*) [16])(ptr1 + uVar279));
        *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        auVar287 = vminss_avx(ZEXT416((uint)fVar666),
                              ZEXT416(*(uint *)((long)ptr1 + uVar279 * 4 + lVar280)));
        *(int *)((long)outptr + uVar279 * 4 + lVar280) = auVar287._0_4_;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    fVar666 = *ptr1;
    if (iVar276 == 4) {
      auVar746 = *(undefined1 (*) [16])ptr1;
      auVar1594 = ZEXT3264(CONCAT1616(auVar746,auVar746));
    }
    else {
      auVar746._4_4_ = fVar666;
      auVar746._0_4_ = fVar666;
      auVar746._8_4_ = fVar666;
      auVar746._12_4_ = fVar666;
      if (iVar276 == 8) {
        auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar888._4_4_ = fVar666;
        auVar888._0_4_ = fVar666;
        auVar888._8_4_ = fVar666;
        auVar888._12_4_ = fVar666;
        auVar888._16_4_ = fVar666;
        auVar888._20_4_ = fVar666;
        auVar888._24_4_ = fVar666;
        auVar888._28_4_ = fVar666;
        auVar1594 = ZEXT3264(auVar888);
        if (iVar276 == 0x10) {
          auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_00387afa;
        }
      }
    }
    auVar888 = auVar1594._0_32_;
    auVar1594 = vinserti64x4_avx512f(auVar1594,auVar888,1);
LAB_00387afa:
    for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar1595 = vminps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr + uVar279));
      *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
    }
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      auVar411 = vminps_avx(auVar888,*(undefined1 (*) [32])(ptr + uVar279));
      *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
    }
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      auVar287 = vminps_avx(auVar746,*(undefined1 (*) [16])(ptr + uVar279));
      *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      auVar287 = vminss_avx(ZEXT416((uint)fVar666),
                            ZEXT416(*(uint *)((long)ptr + uVar279 * 4 + lVar280)));
      *(int *)((long)outptr + uVar279 * 4 + lVar280) = auVar287._0_4_;
      lVar280 = lVar280 + 4;
    }
    return;
  case 6:
    iVar278 = bw;
    if (bw < aw) {
      iVar278 = aw;
    }
    iVar276 = bp;
    if (bp < ap) {
      iVar276 = ap;
    }
    iVar277 = iVar276 * iVar278;
    if (ap != bp) {
LAB_00381abd:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (iVar276 == 0x10) {
          auVar1594 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar632 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar573 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar650 = vpxord_avx512f(auVar1594,auVar573);
          auVar574 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar575 = vpxord_avx512f(auVar574,auVar573);
          auVar573 = vpxord_avx512f(auVar632,auVar573);
          iVar277 = 0;
          if (0 < iVar278) {
            iVar277 = iVar278;
          }
          auVar287 = vxorps_avx512vl(auVar287,auVar287);
          in_ZMM29 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
            auVar576 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,
                                      (undefined1  [64])_ps512_min_norm_pos);
            auVar577 = vpsrld_avx512f(auVar576,0x17);
            auVar576 = vpternlogd_avx512f(auVar576,auVar1594,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar279 = vcmpps_avx512f(auVar576,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar578 = vsubps_avx512f(auVar576,(undefined1  [64])afVar254);
            auVar576 = vaddps_avx512f(auVar578,auVar576);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar598._0_4_ = (uint)bVar281 * auVar576._0_4_ | (uint)!bVar281 * auVar578._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar598._4_4_ = (uint)bVar281 * auVar576._4_4_ | (uint)!bVar281 * auVar578._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar598._8_4_ = (uint)bVar281 * auVar576._8_4_ | (uint)!bVar281 * auVar578._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar598._12_4_ = (uint)bVar281 * auVar576._12_4_ | (uint)!bVar281 * auVar578._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar598._16_4_ = (uint)bVar281 * auVar576._16_4_ | (uint)!bVar281 * auVar578._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar598._20_4_ = (uint)bVar281 * auVar576._20_4_ | (uint)!bVar281 * auVar578._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar598._24_4_ = (uint)bVar281 * auVar576._24_4_ | (uint)!bVar281 * auVar578._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar598._28_4_ = (uint)bVar281 * auVar576._28_4_ | (uint)!bVar281 * auVar578._28_4_;
            bVar11 = (byte)(uVar279 >> 8);
            bVar281 = (bool)(bVar11 & 1);
            auVar598._32_4_ = (uint)bVar281 * auVar576._32_4_ | (uint)!bVar281 * auVar578._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar598._36_4_ = (uint)bVar281 * auVar576._36_4_ | (uint)!bVar281 * auVar578._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar598._40_4_ = (uint)bVar281 * auVar576._40_4_ | (uint)!bVar281 * auVar578._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar598._44_4_ = (uint)bVar281 * auVar576._44_4_ | (uint)!bVar281 * auVar578._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar598._48_4_ = (uint)bVar281 * auVar576._48_4_ | (uint)!bVar281 * auVar578._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar598._52_4_ = (uint)bVar281 * auVar576._52_4_ | (uint)!bVar281 * auVar578._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar598._56_4_ = (uint)bVar281 * auVar576._56_4_ | (uint)!bVar281 * auVar578._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar598._60_4_ = (uint)bVar281 * auVar576._60_4_ | (uint)!bVar281 * auVar578._60_4_;
            auVar576 = vmulps_avx512f(auVar598,auVar598);
            auVar578 = vfmadd132ps_avx512f(auVar598,(undefined1  [64])afVar266,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar598,(undefined1  [64])afVar267);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar598,(undefined1  [64])afVar268);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar598,(undefined1  [64])afVar269);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar598,(undefined1  [64])afVar270);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar598,(undefined1  [64])afVar271);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar598,(undefined1  [64])afVar272);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar598,(undefined1  [64])afVar273);
            auVar579 = vmulps_avx512f(auVar576,auVar598);
            auVar578 = vfmadd213ps_avx512f(auVar579,auVar578,auVar598);
            uVar283 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar287),2);
            auVar577 = vpsubd_avx512f(auVar577,auVar1595);
            auVar577 = vcvtdq2ps_avx512f(auVar577);
            auVar579 = vaddps_avx512f(auVar577,(undefined1  [64])afVar254);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar599._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar579._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar599._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar579._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar599._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar579._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar599._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar579._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar599._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar579._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar599._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar579._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar599._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar579._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar599._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar579._28_4_;
            bVar281 = (bool)(bVar11 & 1);
            auVar599._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar579._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar599._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar579._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar599._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar579._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar599._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar579._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar599._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar579._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar599._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar579._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar599._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar579._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar599._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar579._60_4_;
            auVar577 = vfmadd231ps_avx512f(auVar578,auVar599,auVar632);
            auVar576 = vfmadd231ps_avx512f(auVar577,auVar650,auVar576);
            auVar576 = vfmadd231ps_avx512f(auVar576,auVar574,auVar599);
            bVar281 = (bool)((byte)uVar283 & 1);
            auVar600._0_4_ = (uint)bVar281 * in_ZMM29._0_4_ | (uint)!bVar281 * auVar576._0_4_;
            bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
            auVar600._4_4_ = (uint)bVar281 * in_ZMM29._4_4_ | (uint)!bVar281 * auVar576._4_4_;
            bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
            auVar600._8_4_ = (uint)bVar281 * in_ZMM29._8_4_ | (uint)!bVar281 * auVar576._8_4_;
            bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
            auVar600._12_4_ = (uint)bVar281 * in_ZMM29._12_4_ | (uint)!bVar281 * auVar576._12_4_;
            bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
            auVar600._16_4_ = (uint)bVar281 * in_ZMM29._16_4_ | (uint)!bVar281 * auVar576._16_4_;
            bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
            auVar600._20_4_ = (uint)bVar281 * in_ZMM29._20_4_ | (uint)!bVar281 * auVar576._20_4_;
            bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
            auVar600._24_4_ = (uint)bVar281 * in_ZMM29._24_4_ | (uint)!bVar281 * auVar576._24_4_;
            bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
            auVar600._28_4_ = (uint)bVar281 * in_ZMM29._28_4_ | (uint)!bVar281 * auVar576._28_4_;
            bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
            auVar600._32_4_ = (uint)bVar281 * in_ZMM29._32_4_ | (uint)!bVar281 * auVar576._32_4_;
            bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
            auVar600._36_4_ = (uint)bVar281 * in_ZMM29._36_4_ | (uint)!bVar281 * auVar576._36_4_;
            bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
            auVar600._40_4_ = (uint)bVar281 * in_ZMM29._40_4_ | (uint)!bVar281 * auVar576._40_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
            auVar600._44_4_ = (uint)bVar281 * in_ZMM29._44_4_ | (uint)!bVar281 * auVar576._44_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
            auVar600._48_4_ = (uint)bVar281 * in_ZMM29._48_4_ | (uint)!bVar281 * auVar576._48_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
            auVar600._52_4_ = (uint)bVar281 * in_ZMM29._52_4_ | (uint)!bVar281 * auVar576._52_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
            auVar600._56_4_ = (uint)bVar281 * in_ZMM29._56_4_ | (uint)!bVar281 * auVar576._56_4_;
            bVar281 = SUB81(uVar283 >> 0xf,0);
            auVar600._60_4_ = (uint)bVar281 * in_ZMM29._60_4_ | (uint)!bVar281 * auVar576._60_4_;
            fVar666 = *ptr1;
            auVar576._4_4_ = fVar666;
            auVar576._0_4_ = fVar666;
            auVar576._8_4_ = fVar666;
            auVar576._12_4_ = fVar666;
            auVar576._16_4_ = fVar666;
            auVar576._20_4_ = fVar666;
            auVar576._24_4_ = fVar666;
            auVar576._28_4_ = fVar666;
            auVar576._32_4_ = fVar666;
            auVar576._36_4_ = fVar666;
            auVar576._40_4_ = fVar666;
            auVar576._44_4_ = fVar666;
            auVar576._48_4_ = fVar666;
            auVar576._52_4_ = fVar666;
            auVar576._56_4_ = fVar666;
            auVar576._60_4_ = fVar666;
            auVar576 = vmulps_avx512f(auVar600,auVar576);
            auVar576 = vminps_avx512f(auVar576,(undefined1  [64])afVar255);
            auVar576 = vmaxps_avx512f(auVar576,(undefined1  [64])afVar256);
            auVar577 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar576,auVar1594);
            auVar578 = vrndscaleps_avx512f(auVar577,1);
            uVar279 = vcmpps_avx512f(auVar577,auVar578,1);
            auVar577 = vsubps_avx512f(auVar578,(undefined1  [64])afVar254);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar601._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar578._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar601._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar578._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar601._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar578._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar601._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar578._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar601._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar578._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar601._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar578._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar601._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar578._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar601._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar578._28_4_;
            bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
            auVar601._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar578._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar601._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar578._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar601._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar578._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar601._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar578._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar601._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar578._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar601._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar578._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar601._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar578._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar601._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar578._60_4_;
            auVar576 = vfmadd231ps_avx512f(auVar576,auVar601,auVar575);
            auVar576 = vfmadd231ps_avx512f(auVar576,auVar601,auVar573);
            auVar577 = vmulps_avx512f(auVar576,auVar576);
            auVar578 = vfmadd213ps_avx512f(auVar576,(undefined1  [64])afVar258,
                                           (undefined1  [64])afVar259);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar260);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar261);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar262);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,auVar1594);
            auVar576 = vfmadd213ps_avx512f(auVar578,auVar577,auVar576);
            auVar576 = vaddps_avx512f(auVar576,(undefined1  [64])afVar254);
            auVar577 = vcvttps2dq_avx512f(auVar601);
            auVar577 = vpaddd_avx512f(auVar577,auVar1595);
            auVar577 = vpslld_avx512f(auVar577,0x17);
            auVar576 = vmulps_avx512f(auVar576,auVar577);
            *(undefined1 (*) [64])outptr = auVar576;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
          }
        }
        afVar270 = _ps512_cephes_log_p8;
        afVar269 = _ps512_cephes_log_p7;
        afVar268 = _ps512_cephes_log_p6;
        afVar267 = _ps512_cephes_log_p5;
        afVar266 = _ps512_cephes_log_p4;
        afVar265 = _ps512_cephes_log_p3;
        afVar263 = _ps512_cephes_log_p2;
        afVar262 = _ps512_cephes_log_p1;
        afVar261 = ::_ps512_cephes_exp_p4;
        afVar260 = ::_ps512_cephes_exp_p3;
        afVar259 = ::_ps512_cephes_exp_p2;
        afVar258 = ::_ps512_cephes_exp_p1;
        afVar257 = ::_ps512_cephes_exp_p0;
        afVar256 = ::_ps512_cephes_LOG2EF;
        afVar255 = ::_ps512_exp_lo;
        afVar254 = ::_ps512_exp_hi;
        if (iVar276 == 8) {
          auVar1594 = vmovdqa64_avx512f((undefined1  [64])::_ps512_1);
          auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar632 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar573 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar650 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar574 = vpxord_avx512f(auVar1595,auVar573);
          auVar575 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar576 = vpxord_avx512f(auVar575,auVar573);
          auVar573 = vpxord_avx512f(auVar650,auVar573);
          iVar277 = 0;
          auVar287 = vxorps_avx512vl(auVar287,auVar287);
          auVar577 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          for (; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
            auVar578 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,
                                      (undefined1  [64])_ps512_min_norm_pos);
            auVar579 = vpsrld_avx512f(auVar578,0x17);
            auVar578 = vpternlogd_avx512f(auVar578,auVar1595,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar279 = vcmpps_avx512f(auVar578,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar580 = vsubps_avx512f(auVar578,auVar1594);
            auVar578 = vaddps_avx512f(auVar580,auVar578);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar606._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar580._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar606._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar580._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar606._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar580._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar606._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar580._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar606._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar580._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar606._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar580._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar606._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar580._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar606._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar580._28_4_;
            bVar11 = (byte)(uVar279 >> 8);
            bVar281 = (bool)(bVar11 & 1);
            auVar606._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar580._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar606._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar580._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar606._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar580._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar606._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar580._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar606._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar580._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar606._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar580._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar606._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar580._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar606._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar580._60_4_;
            auVar578 = vmulps_avx512f(auVar606,auVar606);
            auVar580 = vfmadd132ps_avx512f(auVar606,(undefined1  [64])afVar262,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar606,(undefined1  [64])afVar263);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar606,(undefined1  [64])afVar265);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar606,(undefined1  [64])afVar266);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar606,(undefined1  [64])afVar267);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar606,(undefined1  [64])afVar268);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar606,(undefined1  [64])afVar269);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar606,(undefined1  [64])afVar270);
            auVar582 = vmulps_avx512f(auVar578,auVar606);
            auVar580 = vfmadd213ps_avx512f(auVar582,auVar580,auVar606);
            fVar666 = *ptr1;
            fVar667 = ptr1[1];
            auVar1046._4_4_ = fVar667;
            auVar1046._0_4_ = fVar667;
            auVar1046._8_4_ = fVar667;
            auVar1046._12_4_ = fVar667;
            auVar1046._16_4_ = fVar667;
            auVar1046._20_4_ = fVar667;
            auVar1046._24_4_ = fVar667;
            auVar1046._28_4_ = fVar667;
            auVar582 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar1046
                                  ,1);
            uVar283 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar287),2);
            auVar579 = vpsubd_avx512f(auVar579,auVar632);
            auVar579 = vcvtdq2ps_avx512f(auVar579);
            auVar581 = vaddps_avx512f(auVar579,auVar1594);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar607._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar581._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar607._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar581._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar607._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar581._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar607._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar581._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar607._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar581._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar607._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar581._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar607._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar581._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar607._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar581._28_4_;
            bVar281 = (bool)(bVar11 & 1);
            auVar607._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar581._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar607._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar581._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar607._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar581._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar607._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar581._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar607._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar581._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar607._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar581._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar607._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar581._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar607._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar581._60_4_;
            auVar579 = vfmadd231ps_avx512f(auVar580,auVar607,auVar650);
            auVar578 = vfmadd231ps_avx512f(auVar579,auVar574,auVar578);
            auVar578 = vfmadd231ps_avx512f(auVar578,auVar575,auVar607);
            bVar281 = (bool)((byte)uVar283 & 1);
            auVar608._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar578._0_4_;
            bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
            auVar608._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar578._4_4_;
            bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
            auVar608._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar578._8_4_;
            bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
            auVar608._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar578._12_4_;
            bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
            auVar608._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar578._16_4_;
            bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
            auVar608._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar578._20_4_;
            bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
            auVar608._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar578._24_4_;
            bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
            auVar608._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar578._28_4_;
            bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
            auVar608._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar578._32_4_;
            bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
            auVar608._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar578._36_4_;
            bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
            auVar608._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar578._40_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
            auVar608._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar578._44_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
            auVar608._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar578._48_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
            auVar608._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar578._52_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
            auVar608._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar578._56_4_;
            bVar281 = SUB81(uVar283 >> 0xf,0);
            auVar608._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar578._60_4_;
            auVar578 = vmulps_avx512f(auVar608,auVar582);
            auVar578 = vminps_avx512f(auVar578,(undefined1  [64])afVar254);
            auVar578 = vmaxps_avx512f(auVar578,(undefined1  [64])afVar255);
            auVar579 = vfmadd213ps_avx512f((undefined1  [64])afVar256,auVar578,auVar1595);
            auVar580 = vrndscaleps_avx512f(auVar579,1);
            uVar279 = vcmpps_avx512f(auVar579,auVar580,1);
            auVar579 = vsubps_avx512f(auVar580,auVar1594);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar609._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar580._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar609._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar580._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar609._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar580._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar609._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar580._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar609._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar580._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar609._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar580._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar609._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar580._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar609._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar580._28_4_;
            bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
            auVar609._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar580._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar609._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar580._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar609._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar580._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar609._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar580._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar609._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar580._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar609._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar580._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar609._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar580._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar609._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar580._60_4_;
            auVar578 = vfmadd231ps_avx512f(auVar578,auVar609,auVar576);
            auVar578 = vfmadd231ps_avx512f(auVar578,auVar609,auVar573);
            auVar579 = vmulps_avx512f(auVar578,auVar578);
            auVar580 = vfmadd213ps_avx512f(auVar578,(undefined1  [64])afVar257,
                                           (undefined1  [64])afVar258);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar259);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar260);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar261);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,auVar1595);
            auVar578 = vfmadd213ps_avx512f(auVar580,auVar579,auVar578);
            auVar578 = vaddps_avx512f(auVar578,auVar1594);
            auVar579 = vcvttps2dq_avx512f(auVar609);
            auVar579 = vpaddd_avx512f(auVar579,auVar632);
            auVar579 = vpslld_avx512f(auVar579,0x17);
            auVar578 = vmulps_avx512f(auVar578,auVar579);
            *(undefined1 (*) [64])outptr = auVar578;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
          }
          auVar940._8_4_ = 0xffffff82;
          auVar940._0_8_ = 0xffffff82ffffff82;
          auVar940._12_4_ = 0xffffff82;
          auVar940._16_4_ = 0xffffff82;
          auVar940._20_4_ = 0xffffff82;
          auVar940._24_4_ = 0xffffff82;
          auVar940._28_4_ = 0xffffff82;
          auVar998._8_4_ = 0x3f3504f3;
          auVar998._0_8_ = 0x3f3504f33f3504f3;
          auVar998._12_4_ = 0x3f3504f3;
          auVar998._16_4_ = 0x3f3504f3;
          auVar998._20_4_ = 0x3f3504f3;
          auVar998._24_4_ = 0x3f3504f3;
          auVar998._28_4_ = 0x3f3504f3;
          auVar1054._8_4_ = 0xbf800000;
          auVar1054._0_8_ = 0xbf800000bf800000;
          auVar1054._12_4_ = 0xbf800000;
          auVar1054._16_4_ = 0xbf800000;
          auVar1054._20_4_ = 0xbf800000;
          auVar1054._24_4_ = 0xbf800000;
          auVar1054._28_4_ = 0xbf800000;
          auVar1108._8_4_ = 0x3f800000;
          auVar1108._0_8_ = 0x3f8000003f800000;
          auVar1108._12_4_ = 0x3f800000;
          auVar1108._16_4_ = 0x3f800000;
          auVar1108._20_4_ = 0x3f800000;
          auVar1108._24_4_ = 0x3f800000;
          auVar1108._28_4_ = 0x3f800000;
          auVar789._8_4_ = 0x3d9021bb;
          auVar789._0_8_ = 0x3d9021bb3d9021bb;
          auVar789._12_4_ = 0x3d9021bb;
          auVar789._16_4_ = 0x3d9021bb;
          auVar789._20_4_ = 0x3d9021bb;
          auVar789._24_4_ = 0x3d9021bb;
          auVar789._28_4_ = 0x3d9021bb;
          auVar1206._8_4_ = 0xbdebd1b8;
          auVar1206._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1206._12_4_ = 0xbdebd1b8;
          auVar1206._16_4_ = 0xbdebd1b8;
          auVar1206._20_4_ = 0xbdebd1b8;
          auVar1206._24_4_ = 0xbdebd1b8;
          auVar1206._28_4_ = 0xbdebd1b8;
          auVar1258._8_4_ = 0x3def251a;
          auVar1258._0_8_ = 0x3def251a3def251a;
          auVar1258._12_4_ = 0x3def251a;
          auVar1258._16_4_ = 0x3def251a;
          auVar1258._20_4_ = 0x3def251a;
          auVar1258._24_4_ = 0x3def251a;
          auVar1258._28_4_ = 0x3def251a;
          auVar1306._8_4_ = 0xbdfe5d4f;
          auVar1306._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1306._12_4_ = 0xbdfe5d4f;
          auVar1306._16_4_ = 0xbdfe5d4f;
          auVar1306._20_4_ = 0xbdfe5d4f;
          auVar1306._24_4_ = 0xbdfe5d4f;
          auVar1306._28_4_ = 0xbdfe5d4f;
          auVar1360._8_4_ = 0x3e11e9bf;
          auVar1360._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1360._12_4_ = 0x3e11e9bf;
          auVar1360._16_4_ = 0x3e11e9bf;
          auVar1360._20_4_ = 0x3e11e9bf;
          auVar1360._24_4_ = 0x3e11e9bf;
          auVar1360._28_4_ = 0x3e11e9bf;
          auVar1414._8_4_ = 0xbe2aae50;
          auVar1414._0_8_ = 0xbe2aae50be2aae50;
          auVar1414._12_4_ = 0xbe2aae50;
          auVar1414._16_4_ = 0xbe2aae50;
          auVar1414._20_4_ = 0xbe2aae50;
          auVar1414._24_4_ = 0xbe2aae50;
          auVar1414._28_4_ = 0xbe2aae50;
          auVar1468._8_4_ = 0x3e4cceac;
          auVar1468._0_8_ = 0x3e4cceac3e4cceac;
          auVar1468._12_4_ = 0x3e4cceac;
          auVar1468._16_4_ = 0x3e4cceac;
          auVar1468._20_4_ = 0x3e4cceac;
          auVar1468._24_4_ = 0x3e4cceac;
          auVar1468._28_4_ = 0x3e4cceac;
          auVar1521._8_4_ = 0xbe7ffffc;
          auVar1521._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1521._12_4_ = 0xbe7ffffc;
          auVar1521._16_4_ = 0xbe7ffffc;
          auVar1521._20_4_ = 0xbe7ffffc;
          auVar1521._24_4_ = 0xbe7ffffc;
          auVar1521._28_4_ = 0xbe7ffffc;
          auVar1574._8_4_ = 0x3eaaaaaa;
          auVar1574._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar1574._12_4_ = 0x3eaaaaaa;
          auVar1574._16_4_ = 0x3eaaaaaa;
          auVar1574._20_4_ = 0x3eaaaaaa;
          auVar1574._24_4_ = 0x3eaaaaaa;
          auVar1574._28_4_ = 0x3eaaaaaa;
          auVar495 = vpbroadcastd_avx512vl(ZEXT416(0xb95e8083));
          auVar444 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
          auVar558 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar287 = afVar255._0_16_;
          auVar350 = vxorps_avx512vl(auVar287,auVar287);
          auVar411 = vpcmpeqd_avx2(auVar1594._0_32_,auVar1594._0_32_);
          auVar498 = vpbroadcastd_avx512vl(ZEXT416(0x42b0c0a5));
          auVar499 = vpbroadcastd_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar502 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar503 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar287 = auVar422._0_16_;
          auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          in_ZMM29 = ZEXT3264(auVar423);
          for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
            uVar279 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                      ZEXT1632(auVar350),2);
            auVar155._8_4_ = 0x800000;
            auVar155._0_8_ = 0x80000000800000;
            auVar155._12_4_ = 0x800000;
            auVar155._16_4_ = 0x800000;
            auVar155._20_4_ = 0x800000;
            auVar155._24_4_ = 0x800000;
            auVar155._28_4_ = 0x800000;
            auVar424 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar155);
            auVar425 = vpsrld_avx512vl(auVar424,0x17);
            auVar860._8_4_ = 0x807fffff;
            auVar860._0_8_ = 0x807fffff807fffff;
            auVar860._12_4_ = 0x807fffff;
            auVar860._16_4_ = 0x807fffff;
            auVar860._20_4_ = 0x807fffff;
            auVar860._24_4_ = 0x807fffff;
            auVar860._28_4_ = 0x807fffff;
            auVar156._8_4_ = 0x3f000000;
            auVar156._0_8_ = 0x3f0000003f000000;
            auVar156._12_4_ = 0x3f000000;
            auVar156._16_4_ = 0x3f000000;
            auVar156._20_4_ = 0x3f000000;
            auVar156._24_4_ = 0x3f000000;
            auVar156._28_4_ = 0x3f000000;
            auVar424 = vpternlogd_avx512vl(auVar424,auVar860,auVar156,0xea);
            uVar283 = vcmpps_avx512vl(auVar424,auVar998,1);
            auVar418 = vaddps_avx512vl(auVar424,auVar1054);
            auVar424 = vaddps_avx512vl(auVar418,auVar424);
            bVar281 = (bool)((byte)uVar283 & 1);
            auVar469._0_4_ = (uint)bVar281 * auVar424._0_4_ | (uint)!bVar281 * auVar418._0_4_;
            bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
            auVar469._4_4_ = (uint)bVar281 * auVar424._4_4_ | (uint)!bVar281 * auVar418._4_4_;
            bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
            auVar469._8_4_ = (uint)bVar281 * auVar424._8_4_ | (uint)!bVar281 * auVar418._8_4_;
            bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
            auVar469._12_4_ = (uint)bVar281 * auVar424._12_4_ | (uint)!bVar281 * auVar418._12_4_;
            bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
            auVar469._16_4_ = (uint)bVar281 * auVar424._16_4_ | (uint)!bVar281 * auVar418._16_4_;
            bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
            auVar469._20_4_ = (uint)bVar281 * auVar424._20_4_ | (uint)!bVar281 * auVar418._20_4_;
            bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
            auVar469._24_4_ = (uint)bVar281 * auVar424._24_4_ | (uint)!bVar281 * auVar418._24_4_;
            bVar281 = SUB81(uVar283 >> 7,0);
            auVar469._28_4_ = (uint)bVar281 * auVar424._28_4_ | (uint)!bVar281 * auVar418._28_4_;
            auVar418 = vmulps_avx512vl(auVar469,auVar469);
            auVar424 = vfmadd213ps_avx512vl(auVar789,auVar469,auVar1206);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar469,auVar1258);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar469,auVar1306);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar469,auVar1360);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar469,auVar1414);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar469,auVar1468);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar469,auVar1521);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar469,auVar1574);
            auVar427 = vmulps_avx512vl(auVar418,auVar469);
            auVar204._4_4_ = auVar427._4_4_ * auVar424._4_4_;
            auVar204._0_4_ = auVar427._0_4_ * auVar424._0_4_;
            auVar204._8_4_ = auVar427._8_4_ * auVar424._8_4_;
            auVar204._12_4_ = auVar427._12_4_ * auVar424._12_4_;
            auVar204._16_4_ = auVar427._16_4_ * auVar424._16_4_;
            auVar204._20_4_ = auVar427._20_4_ * auVar424._20_4_;
            auVar204._24_4_ = auVar427._24_4_ * auVar424._24_4_;
            auVar204._28_4_ = auVar427._28_4_;
            auVar424 = vpaddd_avx512vl(auVar425,auVar940);
            auVar424 = vcvtdq2ps_avx(auVar424);
            auVar425 = vsubps_avx512vl(auVar424,auVar1108);
            bVar281 = (bool)((byte)uVar283 & 1);
            auVar470._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar424._0_4_;
            bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
            auVar470._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar424._4_4_;
            bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
            auVar470._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar424._8_4_;
            bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
            auVar470._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar424._12_4_;
            bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
            auVar470._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar424._16_4_;
            bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
            auVar470._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar424._20_4_;
            bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
            auVar470._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar424._24_4_;
            bVar281 = SUB81(uVar283 >> 7,0);
            auVar470._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar424._28_4_;
            auVar424 = vfmadd231ps_avx512vl(auVar204,auVar470,auVar495);
            auVar424 = vfmsub231ps_avx512vl(auVar424,auVar444,auVar418);
            auVar424 = vsubps_avx512vl(auVar424,auVar469);
            auVar424 = vfmsub231ps_avx512vl(auVar424,auVar558,auVar470);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar471._0_4_ = (uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar424._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar471._4_4_ = (uint)bVar281 * auVar411._4_4_ | (uint)!bVar281 * auVar424._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar471._8_4_ = (uint)bVar281 * auVar411._8_4_ | (uint)!bVar281 * auVar424._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar471._12_4_ = (uint)bVar281 * auVar411._12_4_ | (uint)!bVar281 * auVar424._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar471._16_4_ = (uint)bVar281 * auVar411._16_4_ | (uint)!bVar281 * auVar424._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar471._20_4_ = (uint)bVar281 * auVar411._20_4_ | (uint)!bVar281 * auVar424._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar471._24_4_ = (uint)bVar281 * auVar411._24_4_ | (uint)!bVar281 * auVar424._24_4_;
            bVar281 = SUB81(uVar279 >> 7,0);
            auVar471._28_4_ = (uint)bVar281 * auVar411._28_4_ | (uint)!bVar281 * auVar424._28_4_;
            fVar666 = *ptr1;
            auVar157._4_4_ = fVar666;
            auVar157._0_4_ = fVar666;
            auVar157._8_4_ = fVar666;
            auVar157._12_4_ = fVar666;
            auVar157._16_4_ = fVar666;
            auVar157._20_4_ = fVar666;
            auVar157._24_4_ = fVar666;
            auVar157._28_4_ = fVar666;
            auVar424 = vmulps_avx512vl(auVar471,auVar157);
            auVar424 = vminps_avx512vl(auVar424,auVar498);
            auVar424 = vmaxps_avx512vl(auVar424,auVar499);
            auVar425 = vfmadd231ps_avx512vl(auVar444,auVar424,auVar502);
            auVar418 = vrndscaleps_avx512vl(auVar425,1);
            uVar279 = vcmpps_avx512vl(auVar425,auVar418,1);
            auVar427 = vsubps_avx512vl(auVar418,auVar1108);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar472._0_4_ = (uint)bVar281 * auVar427._0_4_ | (uint)!bVar281 * auVar418._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar472._4_4_ = (uint)bVar281 * auVar427._4_4_ | (uint)!bVar281 * auVar418._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar472._8_4_ = (uint)bVar281 * auVar427._8_4_ | (uint)!bVar281 * auVar418._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar472._12_4_ = (uint)bVar281 * auVar427._12_4_ | (uint)!bVar281 * auVar418._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar472._16_4_ = (uint)bVar281 * auVar427._16_4_ | (uint)!bVar281 * auVar418._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar472._20_4_ = (uint)bVar281 * auVar427._20_4_ | (uint)!bVar281 * auVar418._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar472._24_4_ = (uint)bVar281 * auVar427._24_4_ | (uint)!bVar281 * auVar418._24_4_;
            bVar281 = SUB81(uVar279 >> 7,0);
            auVar472._28_4_ = (uint)bVar281 * auVar427._28_4_ | (uint)!bVar281 * auVar418._28_4_;
            auVar424 = vfmsub231ps_avx512vl(auVar424,auVar472,auVar558);
            auVar424 = vfnmsub231ps_avx512vl(auVar424,auVar472,auVar495);
            auVar205._4_4_ = auVar424._4_4_ * auVar424._4_4_;
            auVar205._0_4_ = auVar424._0_4_ * auVar424._0_4_;
            auVar205._8_4_ = auVar424._8_4_ * auVar424._8_4_;
            auVar205._12_4_ = auVar424._12_4_ * auVar424._12_4_;
            auVar205._16_4_ = auVar424._16_4_ * auVar424._16_4_;
            auVar205._20_4_ = auVar424._20_4_ * auVar424._20_4_;
            auVar205._24_4_ = auVar424._24_4_ * auVar424._24_4_;
            auVar205._28_4_ = auVar425._28_4_;
            auVar425 = vfmadd213ps_avx512vl(auVar503,auVar424,auVar504);
            auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar420);
            auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar421);
            auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar422);
            auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar444);
            auVar424 = vfmadd213ps_avx512vl(auVar425,auVar205,auVar424);
            auVar425 = vcvttps2dq_avx512vl(auVar472);
            auVar425 = vpslld_avx2(auVar425,0x17);
            auVar425 = vpaddd_avx512vl(auVar425,auVar423);
            auVar424 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar425);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar424;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          }
        }
        afVar269 = _ps512_cephes_log_p8;
        afVar268 = _ps512_cephes_log_p7;
        afVar267 = _ps512_cephes_log_p6;
        afVar266 = _ps512_cephes_log_p5;
        afVar265 = _ps512_cephes_log_p4;
        afVar263 = _ps512_cephes_log_p3;
        afVar262 = _ps512_cephes_log_p2;
        afVar261 = ::_ps512_cephes_exp_p4;
        afVar260 = ::_ps512_cephes_exp_p3;
        afVar259 = ::_ps512_cephes_exp_p2;
        afVar258 = ::_ps512_cephes_exp_p1;
        afVar257 = ::_ps512_cephes_exp_p0;
        afVar256 = ::_ps512_cephes_LOG2EF;
        afVar255 = ::_ps512_exp_lo;
        afVar254 = ::_ps512_exp_hi;
        if (iVar276 != 4) {
          return;
        }
        auVar1594 = vmovdqa64_avx512f((undefined1  [64])::_ps512_1);
        auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar632 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar573 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar650 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar574 = vpxord_avx512f(auVar1595,auVar573);
        auVar575 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar576 = vpxord_avx512f(auVar575,auVar573);
        auVar573 = vpxord_avx512f(auVar650,auVar573);
        uVar279 = 0;
        auVar287 = vxorps_avx512vl(auVar287,auVar287);
        auVar577 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
        for (; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
          auVar350 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279 + 3]));
          fVar666 = ptr1[uVar279 + 2];
          auVar411 = vinsertf32x4_avx512vl
                               (ZEXT1632(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(fVar666,fVar666
                                                                                    )))),auVar350,1)
          ;
          auVar578 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,(undefined1  [64])_ps512_min_norm_pos)
          ;
          auVar579 = vpsrld_avx512f(auVar578,0x17);
          auVar578 = vpternlogd_avx512f(auVar578,auVar1595,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          uVar283 = vcmpps_avx512f(auVar578,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar580 = vsubps_avx512f(auVar578,auVar1594);
          auVar578 = vaddps_avx512f(auVar580,auVar578);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar620._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar580._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar620._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar580._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar620._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar580._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar620._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar580._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar620._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar580._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar620._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar580._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar620._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar580._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar620._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar580._28_4_;
          bVar11 = (byte)(uVar283 >> 8);
          bVar281 = (bool)(bVar11 & 1);
          auVar620._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar580._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar620._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar580._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar620._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar580._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar620._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar580._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar620._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar580._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar620._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar580._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar620._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar580._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar620._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar580._60_4_;
          auVar578 = vmulps_avx512f(auVar620,auVar620);
          auVar580 = vfmadd132ps_avx512f(auVar620,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar620,(undefined1  [64])afVar262);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar620,(undefined1  [64])afVar263);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar620,(undefined1  [64])afVar265);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar620,(undefined1  [64])afVar266);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar620,(undefined1  [64])afVar267);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar620,(undefined1  [64])afVar268);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar620,(undefined1  [64])afVar269);
          auVar582 = vmulps_avx512f(auVar578,auVar620);
          auVar580 = vfmadd213ps_avx512f(auVar582,auVar580,auVar620);
          fVar666 = ptr1[uVar279 + 1];
          fVar667 = ptr1[uVar279];
          auVar582 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar411,1);
          uVar282 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar287),2);
          auVar579 = vpsubd_avx512f(auVar579,auVar632);
          auVar579 = vcvtdq2ps_avx512f(auVar579);
          auVar581 = vaddps_avx512f(auVar579,auVar1594);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar621._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar581._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar621._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar581._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar621._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar581._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar621._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar581._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar621._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar581._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar621._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar581._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar621._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar581._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar621._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar581._28_4_;
          bVar281 = (bool)(bVar11 & 1);
          auVar621._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar581._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar621._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar581._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar621._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar581._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar621._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar581._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar621._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar581._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar621._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar581._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar621._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar581._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar621._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar581._60_4_;
          auVar579 = vfmadd231ps_avx512f(auVar580,auVar621,auVar650);
          auVar578 = vfmadd231ps_avx512f(auVar579,auVar574,auVar578);
          auVar578 = vfmadd231ps_avx512f(auVar578,auVar575,auVar621);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar622._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar578._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar622._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar578._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar622._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar578._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar622._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar578._12_4_;
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar622._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar578._16_4_;
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar622._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar578._20_4_;
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar622._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar578._24_4_;
          bVar281 = (bool)((byte)(uVar282 >> 7) & 1);
          auVar622._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar578._28_4_;
          bVar281 = (bool)((byte)(uVar282 >> 8) & 1);
          auVar622._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar578._32_4_;
          bVar281 = (bool)((byte)(uVar282 >> 9) & 1);
          auVar622._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar578._36_4_;
          bVar281 = (bool)((byte)(uVar282 >> 10) & 1);
          auVar622._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar578._40_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xb) & 1);
          auVar622._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar578._44_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xc) & 1);
          auVar622._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar578._48_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xd) & 1);
          auVar622._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar578._52_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xe) & 1);
          auVar622._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar578._56_4_;
          bVar281 = SUB81(uVar282 >> 0xf,0);
          auVar622._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar578._60_4_;
          auVar578 = vmulps_avx512f(auVar622,auVar582);
          auVar578 = vminps_avx512f(auVar578,(undefined1  [64])afVar254);
          auVar578 = vmaxps_avx512f(auVar578,(undefined1  [64])afVar255);
          auVar579 = vfmadd213ps_avx512f((undefined1  [64])afVar256,auVar578,auVar1595);
          auVar580 = vrndscaleps_avx512f(auVar579,1);
          uVar283 = vcmpps_avx512f(auVar579,auVar580,1);
          auVar579 = vsubps_avx512f(auVar580,auVar1594);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar623._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar580._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar623._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar580._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar623._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar580._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar623._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar580._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar623._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar580._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar623._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar580._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar623._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar580._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar623._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar580._28_4_;
          bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
          auVar623._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar580._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar623._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar580._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar623._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar580._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar623._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar580._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar623._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar580._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar623._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar580._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar623._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar580._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar623._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar580._60_4_;
          auVar578 = vfmadd231ps_avx512f(auVar578,auVar623,auVar576);
          auVar578 = vfmadd231ps_avx512f(auVar578,auVar623,auVar573);
          auVar579 = vmulps_avx512f(auVar578,auVar578);
          auVar580 = vfmadd213ps_avx512f(auVar578,(undefined1  [64])afVar257,
                                         (undefined1  [64])afVar258);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar259);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar260);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar261);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,auVar1595);
          auVar578 = vfmadd213ps_avx512f(auVar580,auVar579,auVar578);
          auVar578 = vaddps_avx512f(auVar578,auVar1594);
          auVar579 = vcvttps2dq_avx512f(auVar623);
          auVar579 = vpaddd_avx512f(auVar579,auVar632);
          auVar579 = vpslld_avx512f(auVar579,0x17);
          auVar578 = vmulps_avx512f(auVar578,auVar579);
          *(undefined1 (*) [64])outptr = auVar578;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        auVar999._8_4_ = 0x3f3504f3;
        auVar999._0_8_ = 0x3f3504f33f3504f3;
        auVar999._12_4_ = 0x3f3504f3;
        auVar999._16_4_ = 0x3f3504f3;
        auVar999._20_4_ = 0x3f3504f3;
        auVar999._24_4_ = 0x3f3504f3;
        auVar999._28_4_ = 0x3f3504f3;
        auVar1055._8_4_ = 0xbf800000;
        auVar1055._0_8_ = 0xbf800000bf800000;
        auVar1055._12_4_ = 0xbf800000;
        auVar1055._16_4_ = 0xbf800000;
        auVar1055._20_4_ = 0xbf800000;
        auVar1055._24_4_ = 0xbf800000;
        auVar1055._28_4_ = 0xbf800000;
        auVar1109._8_4_ = 0x3f800000;
        auVar1109._0_8_ = 0x3f8000003f800000;
        auVar1109._12_4_ = 0x3f800000;
        auVar1109._16_4_ = 0x3f800000;
        auVar1109._20_4_ = 0x3f800000;
        auVar1109._24_4_ = 0x3f800000;
        auVar1109._28_4_ = 0x3f800000;
        auVar861._8_4_ = 0x3d9021bb;
        auVar861._0_8_ = 0x3d9021bb3d9021bb;
        auVar861._12_4_ = 0x3d9021bb;
        auVar861._16_4_ = 0x3d9021bb;
        auVar861._20_4_ = 0x3d9021bb;
        auVar861._24_4_ = 0x3d9021bb;
        auVar861._28_4_ = 0x3d9021bb;
        auVar1207._8_4_ = 0xbdebd1b8;
        auVar1207._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1207._12_4_ = 0xbdebd1b8;
        auVar1207._16_4_ = 0xbdebd1b8;
        auVar1207._20_4_ = 0xbdebd1b8;
        auVar1207._24_4_ = 0xbdebd1b8;
        auVar1207._28_4_ = 0xbdebd1b8;
        auVar1259._8_4_ = 0x3def251a;
        auVar1259._0_8_ = 0x3def251a3def251a;
        auVar1259._12_4_ = 0x3def251a;
        auVar1259._16_4_ = 0x3def251a;
        auVar1259._20_4_ = 0x3def251a;
        auVar1259._24_4_ = 0x3def251a;
        auVar1259._28_4_ = 0x3def251a;
        auVar1307._8_4_ = 0xbdfe5d4f;
        auVar1307._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1307._12_4_ = 0xbdfe5d4f;
        auVar1307._16_4_ = 0xbdfe5d4f;
        auVar1307._20_4_ = 0xbdfe5d4f;
        auVar1307._24_4_ = 0xbdfe5d4f;
        auVar1307._28_4_ = 0xbdfe5d4f;
        auVar1361._8_4_ = 0x3e11e9bf;
        auVar1361._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1361._12_4_ = 0x3e11e9bf;
        auVar1361._16_4_ = 0x3e11e9bf;
        auVar1361._20_4_ = 0x3e11e9bf;
        auVar1361._24_4_ = 0x3e11e9bf;
        auVar1361._28_4_ = 0x3e11e9bf;
        auVar1415._8_4_ = 0xbe2aae50;
        auVar1415._0_8_ = 0xbe2aae50be2aae50;
        auVar1415._12_4_ = 0xbe2aae50;
        auVar1415._16_4_ = 0xbe2aae50;
        auVar1415._20_4_ = 0xbe2aae50;
        auVar1415._24_4_ = 0xbe2aae50;
        auVar1415._28_4_ = 0xbe2aae50;
        auVar1469._8_4_ = 0x3e4cceac;
        auVar1469._0_8_ = 0x3e4cceac3e4cceac;
        auVar1469._12_4_ = 0x3e4cceac;
        auVar1469._16_4_ = 0x3e4cceac;
        auVar1469._20_4_ = 0x3e4cceac;
        auVar1469._24_4_ = 0x3e4cceac;
        auVar1469._28_4_ = 0x3e4cceac;
        auVar1522._8_4_ = 0xbe7ffffc;
        auVar1522._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1522._12_4_ = 0xbe7ffffc;
        auVar1522._16_4_ = 0xbe7ffffc;
        auVar1522._20_4_ = 0xbe7ffffc;
        auVar1522._24_4_ = 0xbe7ffffc;
        auVar1522._28_4_ = 0xbe7ffffc;
        auVar1575._8_4_ = 0x3eaaaaaa;
        auVar1575._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar1575._12_4_ = 0x3eaaaaaa;
        auVar1575._16_4_ = 0x3eaaaaaa;
        auVar1575._20_4_ = 0x3eaaaaaa;
        auVar1575._24_4_ = 0x3eaaaaaa;
        auVar1575._28_4_ = 0x3eaaaaaa;
        auVar495 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar558 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar287 = afVar255._0_16_;
        auVar287 = vxorps_avx512vl(auVar287,auVar287);
        auVar411 = vpcmpeqd_avx2(auVar1594._0_32_,auVar1594._0_32_);
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar499 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar502 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar503 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar423 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
          auVar350 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279 + 1]));
          auVar351 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279]));
          auVar425 = vinsertf32x4_avx512vl(ZEXT1632(auVar351),auVar350,1);
          uVar283 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                    ZEXT1632(auVar287),2);
          auVar158._8_4_ = 0x800000;
          auVar158._0_8_ = 0x80000000800000;
          auVar158._12_4_ = 0x800000;
          auVar158._16_4_ = 0x800000;
          auVar158._20_4_ = 0x800000;
          auVar158._24_4_ = 0x800000;
          auVar158._28_4_ = 0x800000;
          auVar424 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar158);
          auVar418 = vpsrld_avx512vl(auVar424,0x17);
          auVar790._8_4_ = 0x807fffff;
          auVar790._0_8_ = 0x807fffff807fffff;
          auVar790._12_4_ = 0x807fffff;
          auVar790._16_4_ = 0x807fffff;
          auVar790._20_4_ = 0x807fffff;
          auVar790._24_4_ = 0x807fffff;
          auVar790._28_4_ = 0x807fffff;
          auVar159._8_4_ = 0x3f000000;
          auVar159._0_8_ = 0x3f0000003f000000;
          auVar159._12_4_ = 0x3f000000;
          auVar159._16_4_ = 0x3f000000;
          auVar159._20_4_ = 0x3f000000;
          auVar159._24_4_ = 0x3f000000;
          auVar159._28_4_ = 0x3f000000;
          auVar424 = vpternlogd_avx512vl(auVar424,auVar790,auVar159,0xea);
          uVar282 = vcmpps_avx512vl(auVar424,auVar999,1);
          auVar427 = vaddps_avx512vl(auVar424,auVar1055);
          auVar424 = vaddps_avx512vl(auVar427,auVar424);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar473._0_4_ = (uint)bVar281 * auVar424._0_4_ | (uint)!bVar281 * auVar427._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar473._4_4_ = (uint)bVar281 * auVar424._4_4_ | (uint)!bVar281 * auVar427._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar473._8_4_ = (uint)bVar281 * auVar424._8_4_ | (uint)!bVar281 * auVar427._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar473._12_4_ = (uint)bVar281 * auVar424._12_4_ | (uint)!bVar281 * auVar427._12_4_;
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar473._16_4_ = (uint)bVar281 * auVar424._16_4_ | (uint)!bVar281 * auVar427._16_4_;
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar473._20_4_ = (uint)bVar281 * auVar424._20_4_ | (uint)!bVar281 * auVar427._20_4_;
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar473._24_4_ = (uint)bVar281 * auVar424._24_4_ | (uint)!bVar281 * auVar427._24_4_;
          bVar281 = SUB81(uVar282 >> 7,0);
          auVar473._28_4_ = (uint)bVar281 * auVar424._28_4_ | (uint)!bVar281 * auVar427._28_4_;
          auVar427 = vmulps_avx512vl(auVar473,auVar473);
          auVar350 = vfmadd213ps_fma(auVar861,auVar473,auVar1207);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar473,auVar1259);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar473,auVar1307);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar473,auVar1361);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar473,auVar1415);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar473,auVar1469);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar473,auVar1522);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar473,auVar1575);
          auVar424 = vmulps_avx512vl(auVar427,auVar473);
          auVar206._4_4_ = auVar424._4_4_ * auVar350._4_4_;
          auVar206._0_4_ = auVar424._0_4_ * auVar350._0_4_;
          auVar206._8_4_ = auVar424._8_4_ * auVar350._8_4_;
          auVar206._12_4_ = auVar424._12_4_ * auVar350._12_4_;
          auVar206._16_4_ = auVar424._16_4_ * 0.0;
          auVar206._20_4_ = auVar424._20_4_ * 0.0;
          auVar206._24_4_ = auVar424._24_4_ * 0.0;
          auVar206._28_4_ = auVar424._28_4_;
          auVar160._8_4_ = 0xffffff82;
          auVar160._0_8_ = 0xffffff82ffffff82;
          auVar160._12_4_ = 0xffffff82;
          auVar160._16_4_ = 0xffffff82;
          auVar160._20_4_ = 0xffffff82;
          auVar160._24_4_ = 0xffffff82;
          auVar160._28_4_ = 0xffffff82;
          auVar424 = vpaddd_avx512vl(auVar418,auVar160);
          auVar424 = vcvtdq2ps_avx(auVar424);
          auVar418 = vsubps_avx512vl(auVar424,auVar1109);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar474._0_4_ = (uint)bVar281 * auVar418._0_4_ | (uint)!bVar281 * auVar424._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar474._4_4_ = (uint)bVar281 * auVar418._4_4_ | (uint)!bVar281 * auVar424._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar474._8_4_ = (uint)bVar281 * auVar418._8_4_ | (uint)!bVar281 * auVar424._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar474._12_4_ = (uint)bVar281 * auVar418._12_4_ | (uint)!bVar281 * auVar424._12_4_;
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar474._16_4_ = (uint)bVar281 * auVar418._16_4_ | (uint)!bVar281 * auVar424._16_4_;
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar474._20_4_ = (uint)bVar281 * auVar418._20_4_ | (uint)!bVar281 * auVar424._20_4_;
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar474._24_4_ = (uint)bVar281 * auVar418._24_4_ | (uint)!bVar281 * auVar424._24_4_;
          bVar281 = SUB81(uVar282 >> 7,0);
          auVar474._28_4_ = (uint)bVar281 * auVar418._28_4_ | (uint)!bVar281 * auVar424._28_4_;
          auVar424 = vfmadd231ps_avx512vl(auVar206,auVar474,auVar495);
          auVar424 = vfmsub231ps_avx512vl(auVar424,auVar444,auVar427);
          auVar424 = vsubps_avx(auVar424,auVar473);
          auVar424 = vfmsub231ps_avx512vl(auVar424,auVar558,auVar474);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar475._0_4_ = (uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar424._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar475._4_4_ = (uint)bVar281 * auVar411._4_4_ | (uint)!bVar281 * auVar424._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar475._8_4_ = (uint)bVar281 * auVar411._8_4_ | (uint)!bVar281 * auVar424._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar475._12_4_ = (uint)bVar281 * auVar411._12_4_ | (uint)!bVar281 * auVar424._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar475._16_4_ = (uint)bVar281 * auVar411._16_4_ | (uint)!bVar281 * auVar424._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar475._20_4_ = (uint)bVar281 * auVar411._20_4_ | (uint)!bVar281 * auVar424._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar475._24_4_ = (uint)bVar281 * auVar411._24_4_ | (uint)!bVar281 * auVar424._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar475._28_4_ = (uint)bVar281 * auVar411._28_4_ | (uint)!bVar281 * auVar424._28_4_;
          auVar424 = vmulps_avx512vl(auVar475,auVar425);
          auVar424 = vminps_avx512vl(auVar424,auVar498);
          auVar425 = vmaxps_avx512vl(auVar424,auVar499);
          auVar418 = vfmadd231ps_avx512vl(auVar444,auVar425,auVar502);
          auVar424 = vroundps_avx(auVar418,1);
          uVar283 = vcmpps_avx512vl(auVar418,auVar424,1);
          auVar427 = vsubps_avx512vl(auVar424,auVar1109);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar476._0_4_ = (float)((uint)bVar281 * auVar427._0_4_ | (uint)!bVar281 * auVar424._0_4_)
          ;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar476._4_4_ = (float)((uint)bVar281 * auVar427._4_4_ | (uint)!bVar281 * auVar424._4_4_)
          ;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar476._8_4_ = (float)((uint)bVar281 * auVar427._8_4_ | (uint)!bVar281 * auVar424._8_4_)
          ;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar476._12_4_ =
               (float)((uint)bVar281 * auVar427._12_4_ | (uint)!bVar281 * auVar424._12_4_);
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar476._16_4_ =
               (float)((uint)bVar281 * auVar427._16_4_ | (uint)!bVar281 * auVar424._16_4_);
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar476._20_4_ =
               (float)((uint)bVar281 * auVar427._20_4_ | (uint)!bVar281 * auVar424._20_4_);
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar476._24_4_ =
               (float)((uint)bVar281 * auVar427._24_4_ | (uint)!bVar281 * auVar424._24_4_);
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar476._28_4_ =
               (float)((uint)bVar281 * auVar427._28_4_ | (uint)!bVar281 * auVar424._28_4_);
          auVar424 = vfmsub231ps_avx512vl(auVar425,auVar476,auVar558);
          auVar424 = vfnmsub231ps_avx512vl(auVar424,auVar476,auVar495);
          auVar207._4_4_ = auVar424._4_4_ * auVar424._4_4_;
          auVar207._0_4_ = auVar424._0_4_ * auVar424._0_4_;
          auVar207._8_4_ = auVar424._8_4_ * auVar424._8_4_;
          auVar207._12_4_ = auVar424._12_4_ * auVar424._12_4_;
          auVar207._16_4_ = auVar424._16_4_ * auVar424._16_4_;
          auVar207._20_4_ = auVar424._20_4_ * auVar424._20_4_;
          auVar207._24_4_ = auVar424._24_4_ * auVar424._24_4_;
          auVar207._28_4_ = auVar418._28_4_;
          auVar425 = vfmadd213ps_avx512vl(auVar503,auVar424,auVar504);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar420);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar421);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar422);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar444);
          auVar424 = vfmadd213ps_avx512vl(auVar425,auVar207,auVar424);
          auVar791._0_4_ = (int)auVar476._0_4_;
          auVar791._4_4_ = (int)auVar476._4_4_;
          auVar791._8_4_ = (int)auVar476._8_4_;
          auVar791._12_4_ = (int)auVar476._12_4_;
          auVar791._16_4_ = (int)auVar476._16_4_;
          auVar791._20_4_ = (int)auVar476._20_4_;
          auVar791._24_4_ = (int)auVar476._24_4_;
          auVar791._28_4_ = (int)auVar476._28_4_;
          auVar425 = vpslld_avx2(auVar791,0x17);
          auVar425 = vpaddd_avx512vl(auVar425,auVar423);
          auVar424 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar425);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar424;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        lVar280 = 0;
        auVar918._8_4_ = 0x807fffff;
        auVar918._0_8_ = 0x807fffff807fffff;
        auVar918._12_4_ = 0x807fffff;
        auVar971._8_4_ = 0xffffff82;
        auVar971._0_8_ = 0xffffff82ffffff82;
        auVar971._12_4_ = 0xffffff82;
        auVar1028._8_4_ = 0x3f3504f3;
        auVar1028._0_8_ = 0x3f3504f33f3504f3;
        auVar1028._12_4_ = 0x3f3504f3;
        auVar1083._8_4_ = 0xbf800000;
        auVar1083._0_8_ = 0xbf800000bf800000;
        auVar1083._12_4_ = 0xbf800000;
        auVar1136._8_4_ = 0x3f800000;
        auVar1136._0_8_ = 0x3f8000003f800000;
        auVar1136._12_4_ = 0x3f800000;
        auVar737._8_4_ = 0x3d9021bb;
        auVar737._0_8_ = 0x3d9021bb3d9021bb;
        auVar737._12_4_ = 0x3d9021bb;
        auVar1233._8_4_ = 0xbdebd1b8;
        auVar1233._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1233._12_4_ = 0xbdebd1b8;
        auVar1281._8_4_ = 0x3def251a;
        auVar1281._0_8_ = 0x3def251a3def251a;
        auVar1281._12_4_ = 0x3def251a;
        auVar1335._8_4_ = 0xbdfe5d4f;
        auVar1335._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1335._12_4_ = 0xbdfe5d4f;
        auVar1389._8_4_ = 0x3e11e9bf;
        auVar1389._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1389._12_4_ = 0x3e11e9bf;
        auVar1443._8_4_ = 0xbe2aae50;
        auVar1443._0_8_ = 0xbe2aae50be2aae50;
        auVar1443._12_4_ = 0xbe2aae50;
        auVar1496._8_4_ = 0x3e4cceac;
        auVar1496._0_8_ = 0x3e4cceac3e4cceac;
        auVar1496._12_4_ = 0x3e4cceac;
        auVar1550._8_4_ = 0xbe7ffffc;
        auVar1550._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1550._12_4_ = 0xbe7ffffc;
        auVar350 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar351 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar355 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar356 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar359 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar395 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar396 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar296 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar287 = vpcmpeqd_avx(auVar411._0_16_,auVar411._0_16_);
        auVar299 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
            uVar283 = (ulong)((int)uVar283 + 1)) {
          uVar282 = vcmpps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar280 * 4),
                                    _DAT_0054d070,2);
          auVar78._8_4_ = 0x800000;
          auVar78._0_8_ = 0x80000000800000;
          auVar78._12_4_ = 0x800000;
          auVar300 = vmaxps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar280 * 4)
                                     ,auVar78);
          auVar301 = vpsrld_avx512vl(auVar300,0x17);
          auVar79._8_4_ = 0x3f000000;
          auVar79._0_8_ = 0x3f0000003f000000;
          auVar79._12_4_ = 0x3f000000;
          auVar300 = vpternlogd_avx512vl(auVar300,auVar918,auVar79,0xea);
          uVar284 = vcmpps_avx512vl(auVar300,auVar1028,1);
          auVar294 = vaddps_avx512vl(auVar300,auVar1083);
          auVar300 = vaddps_avx512vl(auVar294,auVar300);
          bVar281 = (bool)((byte)uVar284 & 1);
          auVar335._0_4_ = (uint)bVar281 * auVar300._0_4_ | (uint)!bVar281 * auVar294._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar335._4_4_ = (uint)bVar281 * auVar300._4_4_ | (uint)!bVar281 * auVar294._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar335._8_4_ = (uint)bVar281 * auVar300._8_4_ | (uint)!bVar281 * auVar294._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar335._12_4_ = (uint)bVar281 * auVar300._12_4_ | (uint)!bVar281 * auVar294._12_4_;
          auVar294 = vmulps_avx512vl(auVar335,auVar335);
          auVar300 = vfmadd213ps_avx512vl(auVar737,auVar335,auVar1233);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar335,auVar1281);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar335,auVar1335);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar335,auVar1389);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar335,auVar1443);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar335,auVar1496);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar335,auVar1550);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar335,auVar350);
          auVar303 = vmulps_avx512vl(auVar294,auVar335);
          auVar827._0_4_ = auVar300._0_4_ * auVar303._0_4_;
          auVar827._4_4_ = auVar300._4_4_ * auVar303._4_4_;
          auVar827._8_4_ = auVar300._8_4_ * auVar303._8_4_;
          auVar827._12_4_ = auVar300._12_4_ * auVar303._12_4_;
          auVar300 = vpaddd_avx512vl(auVar301,auVar971);
          auVar300 = vcvtdq2ps_avx(auVar300);
          auVar301 = vsubps_avx512vl(auVar300,auVar1136);
          bVar281 = (bool)((byte)uVar284 & 1);
          auVar336._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar300._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar336._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar300._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar336._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar300._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar336._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar300._12_4_;
          auVar300 = vfmadd231ps_avx512vl(auVar827,auVar336,auVar351);
          auVar300 = vfmsub231ps_avx512vl(auVar300,auVar354,auVar294);
          auVar300 = vsubps_avx512vl(auVar300,auVar335);
          auVar300 = vfmsub231ps_avx512vl(auVar300,auVar355,auVar336);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar337._0_4_ = (uint)bVar281 * auVar287._0_4_ | (uint)!bVar281 * auVar300._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar337._4_4_ = (uint)bVar281 * auVar287._4_4_ | (uint)!bVar281 * auVar300._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar337._8_4_ = (uint)bVar281 * auVar287._8_4_ | (uint)!bVar281 * auVar300._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar337._12_4_ = (uint)bVar281 * auVar287._12_4_ | (uint)!bVar281 * auVar300._12_4_;
          uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
          auVar80._4_4_ = uVar1603;
          auVar80._0_4_ = uVar1603;
          auVar80._8_4_ = uVar1603;
          auVar80._12_4_ = uVar1603;
          auVar300 = vmulps_avx512vl(auVar337,auVar80);
          auVar300 = vminps_avx512vl(auVar300,auVar356);
          auVar300 = vmaxps_avx512vl(auVar300,auVar359);
          auVar301 = vfmadd231ps_avx512vl(auVar354,auVar300,auVar360);
          auVar294 = vcvttps2dq_avx512vl(auVar301);
          auVar294 = vcvtdq2ps_avx512vl(auVar294);
          uVar282 = vcmpps_avx512vl(auVar301,auVar294,1);
          auVar301 = vsubps_avx512vl(auVar294,auVar1136);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar338._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar294._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar338._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar294._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar338._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar294._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar338._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar294._12_4_;
          auVar300 = vfmsub231ps_avx512vl(auVar300,auVar338,auVar355);
          auVar300 = vfnmsub231ps_avx512vl(auVar300,auVar338,auVar351);
          auVar1183._0_4_ = auVar300._0_4_ * auVar300._0_4_;
          auVar1183._4_4_ = auVar300._4_4_ * auVar300._4_4_;
          auVar1183._8_4_ = auVar300._8_4_ * auVar300._8_4_;
          auVar1183._12_4_ = auVar300._12_4_ * auVar300._12_4_;
          auVar301 = vfmadd213ps_avx512vl(auVar395,auVar300,auVar396);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar296);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar297);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar298);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar354);
          auVar300 = vfmadd213ps_avx512vl(auVar301,auVar1183,auVar300);
          auVar301 = vcvttps2dq_avx512vl(auVar338);
          auVar301 = vpslld_avx(auVar301,0x17);
          auVar301 = vpaddd_avx512vl(auVar301,auVar299);
          auVar300 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar301);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar300;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (bw == 1) {
        auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_1);
        auVar632 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar573 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar650 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar574 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar575 = vpxord_avx512f(auVar632,auVar650);
        auVar576 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar577 = vpxord_avx512f(auVar576,auVar650);
        auVar650 = vpxord_avx512f(auVar574,auVar650);
        iVar278 = 0xf;
        auVar287 = vxorps_avx512vl(auVar350,auVar350);
        auVar578 = vpternlogd_avx512f(in_ZMM30,in_ZMM30,in_ZMM30,0xff);
        for (; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
          auVar579 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,(undefined1  [64])_ps512_min_norm_pos)
          ;
          auVar580 = vpsrld_avx512f(auVar579,0x17);
          auVar579 = vpternlogd_avx512f(auVar579,auVar632,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          uVar279 = vcmpps_avx512f(auVar579,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar582 = vsubps_avx512f(auVar579,auVar1595);
          auVar579 = vaddps_avx512f(auVar582,auVar579);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar602._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar582._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar602._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar582._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar602._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar582._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar602._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar582._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar602._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar582._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar602._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar582._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar602._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar582._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar602._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar582._28_4_;
          bVar11 = (byte)(uVar279 >> 8);
          bVar281 = (bool)(bVar11 & 1);
          auVar602._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar582._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar602._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar582._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar602._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar582._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar602._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar582._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar602._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar582._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar602._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar582._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar602._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar582._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar602._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar582._60_4_;
          auVar579 = vmulps_avx512f(auVar602,auVar602);
          auVar582 = vfmadd132ps_avx512f(auVar602,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar602,(undefined1  [64])afVar267);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar602,(undefined1  [64])afVar268);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar602,(undefined1  [64])afVar269);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar602,(undefined1  [64])afVar270);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar602,(undefined1  [64])afVar271);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar602,(undefined1  [64])afVar272);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar602,(undefined1  [64])afVar273);
          auVar581 = vmulps_avx512f(auVar579,auVar602);
          auVar582 = vfmadd213ps_avx512f(auVar581,auVar582,auVar602);
          uVar283 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar287),2);
          auVar580 = vpsubd_avx512f(auVar580,auVar573);
          auVar580 = vcvtdq2ps_avx512f(auVar580);
          auVar581 = vaddps_avx512f(auVar580,auVar1595);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar603._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar581._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar603._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar581._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar603._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar581._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar603._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar581._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar603._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar581._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar603._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar581._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar603._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar581._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar603._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar581._28_4_;
          bVar281 = (bool)(bVar11 & 1);
          auVar603._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar581._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar603._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar581._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar603._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar581._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar603._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar581._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar603._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar581._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar603._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar581._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar603._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar581._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar603._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar581._60_4_;
          auVar580 = vfmadd231ps_avx512f(auVar582,auVar603,auVar574);
          auVar579 = vfmadd231ps_avx512f(auVar580,auVar575,auVar579);
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar576,auVar603);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar604._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar579._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar604._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar579._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar604._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar579._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar604._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar579._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar604._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar579._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar604._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar579._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar604._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar579._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar604._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar579._28_4_;
          bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
          auVar604._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar579._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar604._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar579._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar604._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar579._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar604._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar579._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar604._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar579._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar604._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar579._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar604._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar579._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar604._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar579._60_4_;
          auVar579 = vmulps_avx512f(auVar604,auVar1594);
          auVar579 = vminps_avx512f(auVar579,(undefined1  [64])afVar255);
          auVar579 = vmaxps_avx512f(auVar579,(undefined1  [64])afVar256);
          auVar580 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar579,auVar632);
          auVar582 = vrndscaleps_avx512f(auVar580,1);
          uVar279 = vcmpps_avx512f(auVar580,auVar582,1);
          auVar580 = vsubps_avx512f(auVar582,auVar1595);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar605._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar582._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar605._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar582._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar605._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar582._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar605._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar582._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar605._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar582._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar605._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar582._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar605._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar582._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar605._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar582._28_4_;
          bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
          auVar605._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar582._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar605._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar582._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar605._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar582._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar605._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar582._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar605._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar582._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar605._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar582._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar605._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar582._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar605._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar582._60_4_;
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar605,auVar577);
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar605,auVar650);
          auVar580 = vmulps_avx512f(auVar579,auVar579);
          auVar582 = vfmadd213ps_avx512f(auVar579,(undefined1  [64])afVar258,
                                         (undefined1  [64])afVar259);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar260);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar261);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar262);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,auVar632);
          auVar579 = vfmadd213ps_avx512f(auVar582,auVar580,auVar579);
          auVar579 = vaddps_avx512f(auVar579,auVar1595);
          auVar580 = vcvttps2dq_avx512f(auVar605);
          auVar580 = vpaddd_avx512f(auVar580,auVar573);
          auVar580 = vpslld_avx512f(auVar580,0x17);
          auVar579 = vmulps_avx512f(auVar579,auVar580);
          *(undefined1 (*) [64])outptr = auVar579;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        fVar666 = *ptr1;
        iVar278 = iVar278 + -0xc;
        auVar1053._8_4_ = 0x3f3504f3;
        auVar1053._0_8_ = 0x3f3504f33f3504f3;
        auVar1053._12_4_ = 0x3f3504f3;
        auVar1053._16_4_ = 0x3f3504f3;
        auVar1053._20_4_ = 0x3f3504f3;
        auVar1053._24_4_ = 0x3f3504f3;
        auVar1053._28_4_ = 0x3f3504f3;
        auVar1107._8_4_ = 0xbf800000;
        auVar1107._0_8_ = 0xbf800000bf800000;
        auVar1107._12_4_ = 0xbf800000;
        auVar1107._16_4_ = 0xbf800000;
        auVar1107._20_4_ = 0xbf800000;
        auVar1107._24_4_ = 0xbf800000;
        auVar1107._28_4_ = 0xbf800000;
        auVar1156._8_4_ = 0x3f800000;
        auVar1156._0_8_ = 0x3f8000003f800000;
        auVar1156._12_4_ = 0x3f800000;
        auVar1156._16_4_ = 0x3f800000;
        auVar1156._20_4_ = 0x3f800000;
        auVar1156._24_4_ = 0x3f800000;
        auVar1156._28_4_ = 0x3f800000;
        auVar939._8_4_ = 0x3d9021bb;
        auVar939._0_8_ = 0x3d9021bb3d9021bb;
        auVar939._12_4_ = 0x3d9021bb;
        auVar939._16_4_ = 0x3d9021bb;
        auVar939._20_4_ = 0x3d9021bb;
        auVar939._24_4_ = 0x3d9021bb;
        auVar939._28_4_ = 0x3d9021bb;
        auVar1257._8_4_ = 0xbdebd1b8;
        auVar1257._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1257._12_4_ = 0xbdebd1b8;
        auVar1257._16_4_ = 0xbdebd1b8;
        auVar1257._20_4_ = 0xbdebd1b8;
        auVar1257._24_4_ = 0xbdebd1b8;
        auVar1257._28_4_ = 0xbdebd1b8;
        auVar1305._8_4_ = 0x3def251a;
        auVar1305._0_8_ = 0x3def251a3def251a;
        auVar1305._12_4_ = 0x3def251a;
        auVar1305._16_4_ = 0x3def251a;
        auVar1305._20_4_ = 0x3def251a;
        auVar1305._24_4_ = 0x3def251a;
        auVar1305._28_4_ = 0x3def251a;
        auVar1359._8_4_ = 0xbdfe5d4f;
        auVar1359._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1359._12_4_ = 0xbdfe5d4f;
        auVar1359._16_4_ = 0xbdfe5d4f;
        auVar1359._20_4_ = 0xbdfe5d4f;
        auVar1359._24_4_ = 0xbdfe5d4f;
        auVar1359._28_4_ = 0xbdfe5d4f;
        auVar1413._8_4_ = 0x3e11e9bf;
        auVar1413._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1413._12_4_ = 0x3e11e9bf;
        auVar1413._16_4_ = 0x3e11e9bf;
        auVar1413._20_4_ = 0x3e11e9bf;
        auVar1413._24_4_ = 0x3e11e9bf;
        auVar1413._28_4_ = 0x3e11e9bf;
        auVar1467._8_4_ = 0xbe2aae50;
        auVar1467._0_8_ = 0xbe2aae50be2aae50;
        auVar1467._12_4_ = 0xbe2aae50;
        auVar1467._16_4_ = 0xbe2aae50;
        auVar1467._20_4_ = 0xbe2aae50;
        auVar1467._24_4_ = 0xbe2aae50;
        auVar1467._28_4_ = 0xbe2aae50;
        auVar1520._8_4_ = 0x3e4cceac;
        auVar1520._0_8_ = 0x3e4cceac3e4cceac;
        auVar1520._12_4_ = 0x3e4cceac;
        auVar1520._16_4_ = 0x3e4cceac;
        auVar1520._20_4_ = 0x3e4cceac;
        auVar1520._24_4_ = 0x3e4cceac;
        auVar1520._28_4_ = 0x3e4cceac;
        auVar1573._8_4_ = 0xbe7ffffc;
        auVar1573._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1573._12_4_ = 0xbe7ffffc;
        auVar1573._16_4_ = 0xbe7ffffc;
        auVar1573._20_4_ = 0xbe7ffffc;
        auVar1573._24_4_ = 0xbe7ffffc;
        auVar1573._28_4_ = 0xbe7ffffc;
        auVar495 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar444 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar558 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar287 = vxorps_avx512vl(auVar354,auVar354);
        auVar411 = vpcmpeqd_avx2(auVar1595._0_32_,auVar1595._0_32_);
        auVar499 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar502 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar503 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar424 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        for (; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
          uVar279 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                    ZEXT1632(auVar287),2);
          auVar161._8_4_ = 0x800000;
          auVar161._0_8_ = 0x80000000800000;
          auVar161._12_4_ = 0x800000;
          auVar161._16_4_ = 0x800000;
          auVar161._20_4_ = 0x800000;
          auVar161._24_4_ = 0x800000;
          auVar161._28_4_ = 0x800000;
          auVar425 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar161);
          auVar418 = vpsrld_avx512vl(auVar425,0x17);
          auVar858._8_4_ = 0x807fffff;
          auVar858._0_8_ = 0x807fffff807fffff;
          auVar858._12_4_ = 0x807fffff;
          auVar858._16_4_ = 0x807fffff;
          auVar858._20_4_ = 0x807fffff;
          auVar858._24_4_ = 0x807fffff;
          auVar858._28_4_ = 0x807fffff;
          auVar162._8_4_ = 0x3f000000;
          auVar162._0_8_ = 0x3f0000003f000000;
          auVar162._12_4_ = 0x3f000000;
          auVar162._16_4_ = 0x3f000000;
          auVar162._20_4_ = 0x3f000000;
          auVar162._24_4_ = 0x3f000000;
          auVar162._28_4_ = 0x3f000000;
          auVar425 = vpternlogd_avx512vl(auVar425,auVar858,auVar162,0xea);
          uVar283 = vcmpps_avx512vl(auVar425,auVar1053,1);
          auVar427 = vaddps_avx512vl(auVar425,auVar1107);
          auVar425 = vaddps_avx512vl(auVar427,auVar425);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar466._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar427._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar466._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar427._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar466._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar427._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar466._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar427._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar466._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar427._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar466._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar427._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar466._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar427._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar466._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar427._28_4_;
          auVar427 = vmulps_avx512vl(auVar466,auVar466);
          auVar350 = vfmadd213ps_fma(auVar939,auVar466,auVar1257);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar466,auVar1305);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar466,auVar1359);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar466,auVar1413);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar466,auVar1467);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar466,auVar1520);
          auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar466,auVar1573);
          auVar425 = vfmadd213ps_avx512vl(ZEXT1632(auVar350),auVar466,auVar495);
          auVar412 = vmulps_avx512vl(auVar427,auVar466);
          auVar201._4_4_ = auVar425._4_4_ * auVar412._4_4_;
          auVar201._0_4_ = auVar425._0_4_ * auVar412._0_4_;
          auVar201._8_4_ = auVar425._8_4_ * auVar412._8_4_;
          auVar201._12_4_ = auVar425._12_4_ * auVar412._12_4_;
          auVar201._16_4_ = auVar425._16_4_ * auVar412._16_4_;
          auVar201._20_4_ = auVar425._20_4_ * auVar412._20_4_;
          auVar201._24_4_ = auVar425._24_4_ * auVar412._24_4_;
          auVar201._28_4_ = auVar412._28_4_;
          auVar163._8_4_ = 0xffffff82;
          auVar163._0_8_ = 0xffffff82ffffff82;
          auVar163._12_4_ = 0xffffff82;
          auVar163._16_4_ = 0xffffff82;
          auVar163._20_4_ = 0xffffff82;
          auVar163._24_4_ = 0xffffff82;
          auVar163._28_4_ = 0xffffff82;
          auVar425 = vpaddd_avx512vl(auVar418,auVar163);
          auVar425 = vcvtdq2ps_avx(auVar425);
          auVar418 = vsubps_avx512vl(auVar425,auVar1156);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar467._0_4_ = (uint)bVar281 * auVar418._0_4_ | (uint)!bVar281 * auVar425._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar467._4_4_ = (uint)bVar281 * auVar418._4_4_ | (uint)!bVar281 * auVar425._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar467._8_4_ = (uint)bVar281 * auVar418._8_4_ | (uint)!bVar281 * auVar425._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar467._12_4_ = (uint)bVar281 * auVar418._12_4_ | (uint)!bVar281 * auVar425._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar467._16_4_ = (uint)bVar281 * auVar418._16_4_ | (uint)!bVar281 * auVar425._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar467._20_4_ = (uint)bVar281 * auVar418._20_4_ | (uint)!bVar281 * auVar425._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar467._24_4_ = (uint)bVar281 * auVar418._24_4_ | (uint)!bVar281 * auVar425._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar467._28_4_ = (uint)bVar281 * auVar418._28_4_ | (uint)!bVar281 * auVar425._28_4_;
          auVar425 = vfmadd231ps_avx512vl(auVar201,auVar467,auVar444);
          auVar425 = vfmsub231ps_avx512vl(auVar425,auVar558,auVar427);
          auVar425 = vsubps_avx(auVar425,auVar466);
          auVar425 = vfmsub231ps_avx512vl(auVar425,auVar498,auVar467);
          bVar281 = (bool)((byte)uVar279 & 1);
          bVar12 = (bool)((byte)(uVar279 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar279 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar279 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar279 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar279 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar279 >> 6) & 1);
          bVar18 = SUB81(uVar279 >> 7,0);
          auVar202._4_4_ =
               (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar425._4_4_) * fVar666;
          auVar202._0_4_ =
               (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar425._0_4_) * fVar666;
          auVar202._8_4_ =
               (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar425._8_4_) * fVar666;
          auVar202._12_4_ =
               (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar425._12_4_) * fVar666;
          auVar202._16_4_ =
               (float)((uint)bVar15 * auVar411._16_4_ | (uint)!bVar15 * auVar425._16_4_) * fVar666;
          auVar202._20_4_ =
               (float)((uint)bVar16 * auVar411._20_4_ | (uint)!bVar16 * auVar425._20_4_) * fVar666;
          auVar202._24_4_ =
               (float)((uint)bVar17 * auVar411._24_4_ | (uint)!bVar17 * auVar425._24_4_) * fVar666;
          auVar202._28_4_ = (uint)bVar18 * auVar411._28_4_ | (uint)!bVar18 * auVar425._28_4_;
          auVar425 = vminps_avx512vl(auVar202,auVar499);
          auVar418 = vmaxps_avx512vl(auVar425,auVar502);
          auVar427 = vfmadd231ps_avx512vl(auVar558,auVar418,auVar503);
          auVar425 = vroundps_avx(auVar427,1);
          uVar279 = vcmpps_avx512vl(auVar427,auVar425,1);
          auVar412 = vsubps_avx512vl(auVar425,auVar1156);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar468._0_4_ = (float)((uint)bVar281 * auVar412._0_4_ | (uint)!bVar281 * auVar425._0_4_)
          ;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar468._4_4_ = (float)((uint)bVar281 * auVar412._4_4_ | (uint)!bVar281 * auVar425._4_4_)
          ;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar468._8_4_ = (float)((uint)bVar281 * auVar412._8_4_ | (uint)!bVar281 * auVar425._8_4_)
          ;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar468._12_4_ =
               (float)((uint)bVar281 * auVar412._12_4_ | (uint)!bVar281 * auVar425._12_4_);
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar468._16_4_ =
               (float)((uint)bVar281 * auVar412._16_4_ | (uint)!bVar281 * auVar425._16_4_);
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar468._20_4_ =
               (float)((uint)bVar281 * auVar412._20_4_ | (uint)!bVar281 * auVar425._20_4_);
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar468._24_4_ =
               (float)((uint)bVar281 * auVar412._24_4_ | (uint)!bVar281 * auVar425._24_4_);
          bVar281 = SUB81(uVar279 >> 7,0);
          auVar468._28_4_ =
               (float)((uint)bVar281 * auVar412._28_4_ | (uint)!bVar281 * auVar425._28_4_);
          auVar425 = vfmsub231ps_avx512vl(auVar418,auVar468,auVar498);
          auVar425 = vfnmsub231ps_avx512vl(auVar425,auVar468,auVar444);
          auVar203._4_4_ = auVar425._4_4_ * auVar425._4_4_;
          auVar203._0_4_ = auVar425._0_4_ * auVar425._0_4_;
          auVar203._8_4_ = auVar425._8_4_ * auVar425._8_4_;
          auVar203._12_4_ = auVar425._12_4_ * auVar425._12_4_;
          auVar203._16_4_ = auVar425._16_4_ * auVar425._16_4_;
          auVar203._20_4_ = auVar425._20_4_ * auVar425._20_4_;
          auVar203._24_4_ = auVar425._24_4_ * auVar425._24_4_;
          auVar203._28_4_ = auVar427._28_4_;
          auVar418 = vfmadd213ps_avx512vl(auVar504,auVar425,auVar420);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar421);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar422);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar423);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar558);
          auVar425 = vfmadd213ps_avx512vl(auVar418,auVar203,auVar425);
          auVar859._0_4_ = (int)auVar468._0_4_;
          auVar859._4_4_ = (int)auVar468._4_4_;
          auVar859._8_4_ = (int)auVar468._8_4_;
          auVar859._12_4_ = (int)auVar468._12_4_;
          auVar859._16_4_ = (int)auVar468._16_4_;
          auVar859._20_4_ = (int)auVar468._20_4_;
          auVar859._24_4_ = (int)auVar468._24_4_;
          auVar859._28_4_ = (int)auVar468._28_4_;
          auVar418 = vpslld_avx2(auVar859,0x17);
          auVar418 = vpaddd_avx512vl(auVar418,auVar424);
          auVar425 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar418);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar425;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        fVar666 = *ptr1;
        lVar280 = 0;
        auVar1027._8_4_ = 0x3f3504f3;
        auVar1027._0_8_ = 0x3f3504f33f3504f3;
        auVar1027._12_4_ = 0x3f3504f3;
        auVar1082._8_4_ = 0xbf800000;
        auVar1082._0_8_ = 0xbf800000bf800000;
        auVar1082._12_4_ = 0xbf800000;
        auVar1135._8_4_ = 0x3f800000;
        auVar1135._0_8_ = 0x3f8000003f800000;
        auVar1135._12_4_ = 0x3f800000;
        auVar917._8_4_ = 0x3d9021bb;
        auVar917._0_8_ = 0x3d9021bb3d9021bb;
        auVar917._12_4_ = 0x3d9021bb;
        auVar1232._8_4_ = 0xbdebd1b8;
        auVar1232._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1232._12_4_ = 0xbdebd1b8;
        auVar1280._8_4_ = 0x3def251a;
        auVar1280._0_8_ = 0x3def251a3def251a;
        auVar1280._12_4_ = 0x3def251a;
        auVar1334._8_4_ = 0xbdfe5d4f;
        auVar1334._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1334._12_4_ = 0xbdfe5d4f;
        auVar1388._8_4_ = 0x3e11e9bf;
        auVar1388._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1388._12_4_ = 0x3e11e9bf;
        auVar1442._8_4_ = 0xbe2aae50;
        auVar1442._0_8_ = 0xbe2aae50be2aae50;
        auVar1442._12_4_ = 0xbe2aae50;
        auVar1495._8_4_ = 0x3e4cceac;
        auVar1495._0_8_ = 0x3e4cceac3e4cceac;
        auVar1495._12_4_ = 0x3e4cceac;
        auVar1549._8_4_ = 0xbe7ffffc;
        auVar1549._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1549._12_4_ = 0xbe7ffffc;
        auVar350 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar351 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar355 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar356 = vxorps_avx512vl(auVar287,auVar287);
        auVar287 = vpcmpeqd_avx(auVar411._0_16_,auVar411._0_16_);
        auVar359 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar360 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar395 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar396 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar296 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar299 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar300 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
          uVar279 = vcmpps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar280 * 4),
                                    auVar356,2);
          auVar81._8_4_ = 0x800000;
          auVar81._0_8_ = 0x80000000800000;
          auVar81._12_4_ = 0x800000;
          auVar301 = vmaxps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar280 * 4)
                                     ,auVar81);
          auVar294 = vpsrld_avx512vl(auVar301,0x17);
          auVar824._8_4_ = 0x807fffff;
          auVar824._0_8_ = 0x807fffff807fffff;
          auVar824._12_4_ = 0x807fffff;
          auVar82._8_4_ = 0x3f000000;
          auVar82._0_8_ = 0x3f0000003f000000;
          auVar82._12_4_ = 0x3f000000;
          auVar301 = vpternlogd_avx512vl(auVar301,auVar824,auVar82,0xea);
          uVar283 = vcmpps_avx512vl(auVar301,auVar1027,1);
          auVar303 = vaddps_avx512vl(auVar301,auVar1082);
          auVar301 = vaddps_avx512vl(auVar303,auVar301);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar332._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar303._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar332._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar303._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar332._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar303._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar332._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar303._12_4_;
          auVar303 = vmulps_avx512vl(auVar332,auVar332);
          auVar301 = vfmadd213ps_fma(auVar917,auVar332,auVar1232);
          auVar301 = vfmadd213ps_fma(auVar301,auVar332,auVar1280);
          auVar301 = vfmadd213ps_fma(auVar301,auVar332,auVar1334);
          auVar301 = vfmadd213ps_fma(auVar301,auVar332,auVar1388);
          auVar301 = vfmadd213ps_fma(auVar301,auVar332,auVar1442);
          auVar301 = vfmadd213ps_fma(auVar301,auVar332,auVar1495);
          auVar301 = vfmadd213ps_fma(auVar301,auVar332,auVar1549);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar332,auVar350);
          auVar288 = vmulps_avx512vl(auVar303,auVar332);
          auVar969._0_4_ = auVar301._0_4_ * auVar288._0_4_;
          auVar969._4_4_ = auVar301._4_4_ * auVar288._4_4_;
          auVar969._8_4_ = auVar301._8_4_ * auVar288._8_4_;
          auVar969._12_4_ = auVar301._12_4_ * auVar288._12_4_;
          auVar83._8_4_ = 0xffffff82;
          auVar83._0_8_ = 0xffffff82ffffff82;
          auVar83._12_4_ = 0xffffff82;
          auVar301 = vpaddd_avx512vl(auVar294,auVar83);
          auVar301 = vcvtdq2ps_avx(auVar301);
          auVar294 = vsubps_avx512vl(auVar301,auVar1135);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar333._0_4_ = (uint)bVar281 * auVar294._0_4_ | (uint)!bVar281 * auVar301._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar333._4_4_ = (uint)bVar281 * auVar294._4_4_ | (uint)!bVar281 * auVar301._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar333._8_4_ = (uint)bVar281 * auVar294._8_4_ | (uint)!bVar281 * auVar301._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar333._12_4_ = (uint)bVar281 * auVar294._12_4_ | (uint)!bVar281 * auVar301._12_4_;
          auVar301 = vfmadd231ps_avx512vl(auVar969,auVar333,auVar351);
          auVar301 = vfmsub231ps_avx512vl(auVar301,auVar354,auVar303);
          auVar301 = vsubps_avx(auVar301,auVar332);
          auVar301 = vfmsub231ps_avx512vl(auVar301,auVar355,auVar333);
          bVar281 = (bool)((byte)uVar279 & 1);
          bVar12 = (bool)((byte)(uVar279 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar279 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar825._0_4_ =
               (float)((uint)bVar281 * auVar287._0_4_ | (uint)!bVar281 * auVar301._0_4_) * fVar666;
          auVar825._4_4_ =
               (float)((uint)bVar12 * auVar287._4_4_ | (uint)!bVar12 * auVar301._4_4_) * fVar666;
          auVar825._8_4_ =
               (float)((uint)bVar13 * auVar287._8_4_ | (uint)!bVar13 * auVar301._8_4_) * fVar666;
          auVar825._12_4_ =
               (float)((uint)bVar14 * auVar287._12_4_ | (uint)!bVar14 * auVar301._12_4_) * fVar666;
          auVar301 = vminps_avx512vl(auVar825,auVar359);
          auVar294 = vmaxps_avx512vl(auVar301,auVar360);
          auVar303 = vfmadd231ps_avx512vl(auVar354,auVar294,auVar395);
          auVar1182._0_4_ = (int)auVar303._0_4_;
          auVar1182._4_4_ = (int)auVar303._4_4_;
          auVar1182._8_4_ = (int)auVar303._8_4_;
          auVar1182._12_4_ = (int)auVar303._12_4_;
          auVar301 = vcvtdq2ps_avx(auVar1182);
          uVar279 = vcmpps_avx512vl(auVar303,auVar301,1);
          auVar303 = vsubps_avx512vl(auVar301,auVar1135);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar334._0_4_ = (float)((uint)bVar281 * auVar303._0_4_ | (uint)!bVar281 * auVar301._0_4_)
          ;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar334._4_4_ = (float)((uint)bVar281 * auVar303._4_4_ | (uint)!bVar281 * auVar301._4_4_)
          ;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar334._8_4_ = (float)((uint)bVar281 * auVar303._8_4_ | (uint)!bVar281 * auVar301._8_4_)
          ;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar334._12_4_ =
               (float)((uint)bVar281 * auVar303._12_4_ | (uint)!bVar281 * auVar301._12_4_);
          auVar301 = vfmsub231ps_avx512vl(auVar294,auVar334,auVar355);
          auVar301 = vfnmsub231ps_avx512vl(auVar301,auVar334,auVar351);
          auVar970._0_4_ = auVar301._0_4_ * auVar301._0_4_;
          auVar970._4_4_ = auVar301._4_4_ * auVar301._4_4_;
          auVar970._8_4_ = auVar301._8_4_ * auVar301._8_4_;
          auVar970._12_4_ = auVar301._12_4_ * auVar301._12_4_;
          auVar294 = vfmadd213ps_avx512vl(auVar396,auVar301,auVar296);
          auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar297);
          auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar298);
          auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar299);
          auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar354);
          auVar301 = vfmadd213ps_avx512vl(auVar294,auVar970,auVar301);
          auVar826._0_4_ = (int)auVar334._0_4_;
          auVar826._4_4_ = (int)auVar334._4_4_;
          auVar826._8_4_ = (int)auVar334._8_4_;
          auVar826._12_4_ = (int)auVar334._12_4_;
          auVar294 = vpslld_avx(auVar826,0x17);
          auVar294 = vpaddd_avx512vl(auVar294,auVar300);
          auVar301 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar294);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar301;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar276 == 0x10) {
        auVar1594 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar632 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar573 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar650 = vpxord_avx512f(auVar1594,auVar573);
        auVar574 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar575 = vpxord_avx512f(auVar574,auVar573);
        auVar573 = vpxord_avx512f(auVar632,auVar573);
        auVar287 = vxorps_avx512vl(auVar351,auVar351);
        uVar279 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar287),2);
        auVar576 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,(undefined1  [64])_ps512_min_norm_pos);
        auVar577 = vmovdqa64_avx512f((undefined1  [64])_ps512_inv_mant_mask);
        auVar577 = vpternlogd_avx512f(auVar577,auVar576,auVar1594,0xea);
        auVar351 = auVar577._0_16_;
        uVar283 = vcmpps_avx512f(auVar577,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar578 = vpternlogd_avx512f(in_ZMM27,in_ZMM27,in_ZMM27,0xff);
        iVar277 = iVar278;
        while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
          auVar579 = vsubps_avx512f(auVar577,(undefined1  [64])afVar254);
          auVar580 = vaddps_avx512f(auVar579,auVar577);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar616._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar579._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar616._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar579._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar616._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar579._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar616._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar579._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar616._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar579._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar616._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar579._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar616._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar579._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar616._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar579._28_4_;
          bVar11 = (byte)(uVar283 >> 8);
          bVar281 = (bool)(bVar11 & 1);
          auVar616._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar579._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar616._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar579._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar616._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar579._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar616._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar579._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar616._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar579._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar616._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar579._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar616._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar579._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar616._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar579._60_4_;
          auVar579 = vmulps_avx512f(auVar616,auVar616);
          auVar580 = vfmadd213ps_avx512f(auVar616,(undefined1  [64])afVar265,
                                         (undefined1  [64])afVar266);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar616,(undefined1  [64])afVar267);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar616,(undefined1  [64])afVar268);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar616,(undefined1  [64])afVar269);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar616,(undefined1  [64])afVar270);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar616,(undefined1  [64])afVar271);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar616,(undefined1  [64])afVar272);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar616,(undefined1  [64])afVar273);
          auVar582 = vmulps_avx512f(auVar579,auVar616);
          auVar580 = vfmadd213ps_avx512f(auVar582,auVar580,auVar616);
          auVar582 = vpsrld_avx512f(auVar576,0x17);
          auVar582 = vpsubd_avx512f(auVar582,auVar1595);
          auVar582 = vcvtdq2ps_avx512f(auVar582);
          auVar581 = vaddps_avx512f(auVar582,(undefined1  [64])afVar254);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar617._0_4_ = (uint)bVar281 * auVar582._0_4_ | (uint)!bVar281 * auVar581._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar617._4_4_ = (uint)bVar281 * auVar582._4_4_ | (uint)!bVar281 * auVar581._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar617._8_4_ = (uint)bVar281 * auVar582._8_4_ | (uint)!bVar281 * auVar581._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar617._12_4_ = (uint)bVar281 * auVar582._12_4_ | (uint)!bVar281 * auVar581._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar617._16_4_ = (uint)bVar281 * auVar582._16_4_ | (uint)!bVar281 * auVar581._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar617._20_4_ = (uint)bVar281 * auVar582._20_4_ | (uint)!bVar281 * auVar581._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar617._24_4_ = (uint)bVar281 * auVar582._24_4_ | (uint)!bVar281 * auVar581._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar617._28_4_ = (uint)bVar281 * auVar582._28_4_ | (uint)!bVar281 * auVar581._28_4_;
          bVar281 = (bool)(bVar11 & 1);
          auVar617._32_4_ = (uint)bVar281 * auVar582._32_4_ | (uint)!bVar281 * auVar581._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar617._36_4_ = (uint)bVar281 * auVar582._36_4_ | (uint)!bVar281 * auVar581._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar617._40_4_ = (uint)bVar281 * auVar582._40_4_ | (uint)!bVar281 * auVar581._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar617._44_4_ = (uint)bVar281 * auVar582._44_4_ | (uint)!bVar281 * auVar581._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar617._48_4_ = (uint)bVar281 * auVar582._48_4_ | (uint)!bVar281 * auVar581._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar617._52_4_ = (uint)bVar281 * auVar582._52_4_ | (uint)!bVar281 * auVar581._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar617._56_4_ = (uint)bVar281 * auVar582._56_4_ | (uint)!bVar281 * auVar581._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar617._60_4_ = (uint)bVar281 * auVar582._60_4_ | (uint)!bVar281 * auVar581._60_4_;
          auVar580 = vfmadd231ps_avx512f(auVar580,auVar617,auVar632);
          auVar579 = vfmadd231ps_avx512f(auVar580,auVar650,auVar579);
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar574,auVar617);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar618._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar579._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar618._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar579._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar618._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar579._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar618._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar579._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar618._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar579._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar618._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar579._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar618._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar579._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar618._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar579._28_4_;
          bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
          auVar618._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar579._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar618._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar579._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar618._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar579._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar618._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar579._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar618._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar579._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar618._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar579._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar618._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar579._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar618._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar579._60_4_;
          fVar666 = *ptr1;
          auVar178._4_4_ = fVar666;
          auVar178._0_4_ = fVar666;
          auVar178._8_4_ = fVar666;
          auVar178._12_4_ = fVar666;
          auVar178._16_4_ = fVar666;
          auVar178._20_4_ = fVar666;
          auVar178._24_4_ = fVar666;
          auVar178._28_4_ = fVar666;
          auVar178._32_4_ = fVar666;
          auVar178._36_4_ = fVar666;
          auVar178._40_4_ = fVar666;
          auVar178._44_4_ = fVar666;
          auVar178._48_4_ = fVar666;
          auVar178._52_4_ = fVar666;
          auVar178._56_4_ = fVar666;
          auVar178._60_4_ = fVar666;
          auVar579 = vmulps_avx512f(auVar618,auVar178);
          auVar579 = vminps_avx512f(auVar579,(undefined1  [64])afVar255);
          auVar579 = vmaxps_avx512f(auVar579,(undefined1  [64])afVar256);
          auVar580 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar579,auVar1594);
          auVar582 = vrndscaleps_avx512f(auVar580,1);
          uVar282 = vcmpps_avx512f(auVar580,auVar582,1);
          auVar580 = vsubps_avx512f(auVar582,(undefined1  [64])afVar254);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar619._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar582._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar619._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar582._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar619._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar582._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar619._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar582._12_4_;
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar619._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar582._16_4_;
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar619._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar582._20_4_;
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar619._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar582._24_4_;
          bVar281 = (bool)((byte)(uVar282 >> 7) & 1);
          auVar619._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar582._28_4_;
          bVar281 = (bool)((byte)(uVar282 >> 8) & 1);
          auVar619._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar582._32_4_;
          bVar281 = (bool)((byte)(uVar282 >> 9) & 1);
          auVar619._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar582._36_4_;
          bVar281 = (bool)((byte)(uVar282 >> 10) & 1);
          auVar619._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar582._40_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xb) & 1);
          auVar619._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar582._44_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xc) & 1);
          auVar619._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar582._48_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xd) & 1);
          auVar619._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar582._52_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xe) & 1);
          auVar619._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar582._56_4_;
          bVar281 = SUB81(uVar282 >> 0xf,0);
          auVar619._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar582._60_4_;
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar619,auVar575);
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar619,auVar573);
          auVar580 = vmulps_avx512f(auVar579,auVar579);
          auVar582 = vfmadd213ps_avx512f(auVar579,(undefined1  [64])afVar258,
                                         (undefined1  [64])afVar259);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar260);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar261);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar262);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,auVar1594);
          auVar579 = vfmadd213ps_avx512f(auVar582,auVar580,auVar579);
          auVar579 = vaddps_avx512f(auVar579,(undefined1  [64])afVar254);
          auVar580 = vcvttps2dq_avx512f(auVar619);
          auVar580 = vpaddd_avx512f(auVar580,auVar1595);
          in_ZMM29 = vpslld_avx512f(auVar580,0x17);
          in_ZMM28 = vmulps_avx512f(auVar579,in_ZMM29);
          *(undefined1 (*) [64])outptr = in_ZMM28;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
        }
      }
      afVar270 = _ps512_cephes_log_p8;
      afVar269 = _ps512_cephes_log_p7;
      afVar268 = _ps512_cephes_log_p6;
      afVar267 = _ps512_cephes_log_p5;
      afVar266 = _ps512_cephes_log_p4;
      afVar265 = _ps512_cephes_log_p3;
      afVar263 = _ps512_cephes_log_p2;
      aiVar264 = ::_pi32_512_0x7f;
      afVar262 = ::_ps512_cephes_exp_p4;
      afVar261 = ::_ps512_cephes_exp_p3;
      afVar260 = ::_ps512_cephes_exp_p2;
      afVar259 = ::_ps512_cephes_exp_p1;
      afVar258 = ::_ps512_cephes_exp_p0;
      afVar257 = ::_ps512_cephes_LOG2EF;
      afVar256 = ::_ps512_exp_lo;
      afVar255 = ::_ps512_exp_hi;
      afVar254 = ::_ps512_1;
      if (iVar276 == 8) {
        auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar632 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar573 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar650 = vpxord_avx512f(auVar1595,auVar573);
        auVar574 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar575 = vpxord_avx512f(auVar574,auVar573);
        auVar573 = vpxord_avx512f(auVar632,auVar573);
        iVar277 = 0;
        auVar287 = vxorps_avx512vl(auVar351,auVar351);
        uVar279 = vcmpps_avx512f(auVar1594,ZEXT1664(auVar287),2);
        auVar576 = vmaxps_avx512f(auVar1594,(undefined1  [64])_ps512_min_norm_pos);
        auVar577 = vmovdqa64_avx512f((undefined1  [64])_ps512_inv_mant_mask);
        auVar577 = vpternlogd_avx512f(auVar577,auVar576,auVar1595,0xea);
        uVar283 = vcmpps_avx512f(auVar577,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar578 = vpternlogd_avx512f(in_ZMM28,in_ZMM28,in_ZMM28,0xff);
        for (; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
          auVar411 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar495 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar579 = vinsertf64x4_avx512f(ZEXT3264(auVar411),auVar495,1);
          auVar580 = vsubps_avx512f(auVar577,(undefined1  [64])afVar254);
          auVar582 = vaddps_avx512f(auVar580,auVar577);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar628._0_4_ = (uint)bVar281 * auVar582._0_4_ | (uint)!bVar281 * auVar580._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar628._4_4_ = (uint)bVar281 * auVar582._4_4_ | (uint)!bVar281 * auVar580._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar628._8_4_ = (uint)bVar281 * auVar582._8_4_ | (uint)!bVar281 * auVar580._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar628._12_4_ = (uint)bVar281 * auVar582._12_4_ | (uint)!bVar281 * auVar580._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar628._16_4_ = (uint)bVar281 * auVar582._16_4_ | (uint)!bVar281 * auVar580._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar628._20_4_ = (uint)bVar281 * auVar582._20_4_ | (uint)!bVar281 * auVar580._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar628._24_4_ = (uint)bVar281 * auVar582._24_4_ | (uint)!bVar281 * auVar580._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar628._28_4_ = (uint)bVar281 * auVar582._28_4_ | (uint)!bVar281 * auVar580._28_4_;
          bVar11 = (byte)(uVar283 >> 8);
          bVar281 = (bool)(bVar11 & 1);
          auVar628._32_4_ = (uint)bVar281 * auVar582._32_4_ | (uint)!bVar281 * auVar580._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar628._36_4_ = (uint)bVar281 * auVar582._36_4_ | (uint)!bVar281 * auVar580._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar628._40_4_ = (uint)bVar281 * auVar582._40_4_ | (uint)!bVar281 * auVar580._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar628._44_4_ = (uint)bVar281 * auVar582._44_4_ | (uint)!bVar281 * auVar580._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar628._48_4_ = (uint)bVar281 * auVar582._48_4_ | (uint)!bVar281 * auVar580._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar628._52_4_ = (uint)bVar281 * auVar582._52_4_ | (uint)!bVar281 * auVar580._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar628._56_4_ = (uint)bVar281 * auVar582._56_4_ | (uint)!bVar281 * auVar580._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar628._60_4_ = (uint)bVar281 * auVar582._60_4_ | (uint)!bVar281 * auVar580._60_4_;
          auVar580 = vmulps_avx512f(auVar628,auVar628);
          auVar582 = vfmadd132ps_avx512f(auVar628,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar628,(undefined1  [64])afVar263);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar628,(undefined1  [64])afVar265);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar628,(undefined1  [64])afVar266);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar628,(undefined1  [64])afVar267);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar628,(undefined1  [64])afVar268);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar628,(undefined1  [64])afVar269);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar628,(undefined1  [64])afVar270);
          auVar581 = vmulps_avx512f(auVar580,auVar628);
          auVar582 = vfmadd213ps_avx512f(auVar581,auVar582,auVar628);
          auVar581 = vpsrld_avx512f(auVar576,0x17);
          auVar581 = vpsubd_avx512f(auVar581,(undefined1  [64])aiVar264);
          auVar581 = vcvtdq2ps_avx512f(auVar581);
          auVar642 = vaddps_avx512f(auVar581,(undefined1  [64])afVar254);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar629._0_4_ = (uint)bVar281 * auVar581._0_4_ | (uint)!bVar281 * auVar642._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar629._4_4_ = (uint)bVar281 * auVar581._4_4_ | (uint)!bVar281 * auVar642._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar629._8_4_ = (uint)bVar281 * auVar581._8_4_ | (uint)!bVar281 * auVar642._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar629._12_4_ = (uint)bVar281 * auVar581._12_4_ | (uint)!bVar281 * auVar642._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar629._16_4_ = (uint)bVar281 * auVar581._16_4_ | (uint)!bVar281 * auVar642._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar629._20_4_ = (uint)bVar281 * auVar581._20_4_ | (uint)!bVar281 * auVar642._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar629._24_4_ = (uint)bVar281 * auVar581._24_4_ | (uint)!bVar281 * auVar642._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar629._28_4_ = (uint)bVar281 * auVar581._28_4_ | (uint)!bVar281 * auVar642._28_4_;
          bVar281 = (bool)(bVar11 & 1);
          auVar629._32_4_ = (uint)bVar281 * auVar581._32_4_ | (uint)!bVar281 * auVar642._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar629._36_4_ = (uint)bVar281 * auVar581._36_4_ | (uint)!bVar281 * auVar642._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar629._40_4_ = (uint)bVar281 * auVar581._40_4_ | (uint)!bVar281 * auVar642._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar629._44_4_ = (uint)bVar281 * auVar581._44_4_ | (uint)!bVar281 * auVar642._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar629._48_4_ = (uint)bVar281 * auVar581._48_4_ | (uint)!bVar281 * auVar642._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar629._52_4_ = (uint)bVar281 * auVar581._52_4_ | (uint)!bVar281 * auVar642._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar629._56_4_ = (uint)bVar281 * auVar581._56_4_ | (uint)!bVar281 * auVar642._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar629._60_4_ = (uint)bVar281 * auVar581._60_4_ | (uint)!bVar281 * auVar642._60_4_;
          auVar582 = vfmadd231ps_avx512f(auVar582,auVar629,auVar632);
          auVar580 = vfmadd231ps_avx512f(auVar582,auVar650,auVar580);
          auVar580 = vfmadd231ps_avx512f(auVar580,auVar574,auVar629);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar630._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar580._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar630._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar580._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar630._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar580._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar630._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar580._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar630._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar580._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar630._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar580._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar630._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar580._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar630._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar580._28_4_;
          bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
          auVar630._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar580._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar630._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar580._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar630._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar580._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar630._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar580._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar630._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar580._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar630._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar580._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar630._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar580._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar630._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar580._60_4_;
          auVar579 = vmulps_avx512f(auVar630,auVar579);
          auVar579 = vminps_avx512f(auVar579,(undefined1  [64])afVar255);
          auVar579 = vmaxps_avx512f(auVar579,(undefined1  [64])afVar256);
          auVar580 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar579,auVar1595);
          auVar582 = vrndscaleps_avx512f(auVar580,1);
          uVar282 = vcmpps_avx512f(auVar580,auVar582,1);
          auVar580 = vsubps_avx512f(auVar582,(undefined1  [64])afVar254);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar631._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar582._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar631._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar582._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar631._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar582._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar631._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar582._12_4_;
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar631._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar582._16_4_;
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar631._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar582._20_4_;
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar631._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar582._24_4_;
          bVar281 = (bool)((byte)(uVar282 >> 7) & 1);
          auVar631._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar582._28_4_;
          bVar281 = (bool)((byte)(uVar282 >> 8) & 1);
          auVar631._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar582._32_4_;
          bVar281 = (bool)((byte)(uVar282 >> 9) & 1);
          auVar631._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar582._36_4_;
          bVar281 = (bool)((byte)(uVar282 >> 10) & 1);
          auVar631._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar582._40_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xb) & 1);
          auVar631._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar582._44_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xc) & 1);
          auVar631._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar582._48_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xd) & 1);
          auVar631._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar582._52_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xe) & 1);
          auVar631._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar582._56_4_;
          bVar281 = SUB81(uVar282 >> 0xf,0);
          auVar631._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar582._60_4_;
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar631,auVar575);
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar631,auVar573);
          auVar580 = vmulps_avx512f(auVar579,auVar579);
          auVar582 = vfmadd213ps_avx512f(auVar579,(undefined1  [64])afVar258,
                                         (undefined1  [64])afVar259);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar260);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar261);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar262);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,auVar1595);
          auVar579 = vfmadd213ps_avx512f(auVar582,auVar580,auVar579);
          auVar579 = vaddps_avx512f(auVar579,(undefined1  [64])afVar254);
          auVar580 = vcvttps2dq_avx512f(auVar631);
          auVar580 = vpaddd_avx512f(auVar580,(undefined1  [64])aiVar264);
          auVar580 = vpslld_avx512f(auVar580,0x17);
          auVar579 = vmulps_avx512f(auVar579,auVar580);
          *(undefined1 (*) [64])outptr = auVar579;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
        }
        auVar287 = ZEXT816(0) << 0x40;
        auVar1012._8_4_ = 0xffffff82;
        auVar1012._0_8_ = 0xffffff82ffffff82;
        auVar1012._12_4_ = 0xffffff82;
        auVar1012._16_4_ = 0xffffff82;
        auVar1012._20_4_ = 0xffffff82;
        auVar1012._24_4_ = 0xffffff82;
        auVar1012._28_4_ = 0xffffff82;
        auVar1068._8_4_ = 0x3f3504f3;
        auVar1068._0_8_ = 0x3f3504f33f3504f3;
        auVar1068._12_4_ = 0x3f3504f3;
        auVar1068._16_4_ = 0x3f3504f3;
        auVar1068._20_4_ = 0x3f3504f3;
        auVar1068._24_4_ = 0x3f3504f3;
        auVar1068._28_4_ = 0x3f3504f3;
        auVar1120._8_4_ = 0xbf800000;
        auVar1120._0_8_ = 0xbf800000bf800000;
        auVar1120._12_4_ = 0xbf800000;
        auVar1120._16_4_ = 0xbf800000;
        auVar1120._20_4_ = 0xbf800000;
        auVar1120._24_4_ = 0xbf800000;
        auVar1120._28_4_ = 0xbf800000;
        auVar1167._8_4_ = 0x3f800000;
        auVar1167._0_8_ = 0x3f8000003f800000;
        auVar1167._12_4_ = 0x3f800000;
        auVar1167._16_4_ = 0x3f800000;
        auVar1167._20_4_ = 0x3f800000;
        auVar1167._24_4_ = 0x3f800000;
        auVar1167._28_4_ = 0x3f800000;
        auVar896._8_4_ = 0x3d9021bb;
        auVar896._0_8_ = 0x3d9021bb3d9021bb;
        auVar896._12_4_ = 0x3d9021bb;
        auVar896._16_4_ = 0x3d9021bb;
        auVar896._20_4_ = 0x3d9021bb;
        auVar896._24_4_ = 0x3d9021bb;
        auVar896._28_4_ = 0x3d9021bb;
        auVar1268._8_4_ = 0xbdebd1b8;
        auVar1268._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1268._12_4_ = 0xbdebd1b8;
        auVar1268._16_4_ = 0xbdebd1b8;
        auVar1268._20_4_ = 0xbdebd1b8;
        auVar1268._24_4_ = 0xbdebd1b8;
        auVar1268._28_4_ = 0xbdebd1b8;
        auVar1319._8_4_ = 0x3def251a;
        auVar1319._0_8_ = 0x3def251a3def251a;
        auVar1319._12_4_ = 0x3def251a;
        auVar1319._16_4_ = 0x3def251a;
        auVar1319._20_4_ = 0x3def251a;
        auVar1319._24_4_ = 0x3def251a;
        auVar1319._28_4_ = 0x3def251a;
        auVar1373._8_4_ = 0xbdfe5d4f;
        auVar1373._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1373._12_4_ = 0xbdfe5d4f;
        auVar1373._16_4_ = 0xbdfe5d4f;
        auVar1373._20_4_ = 0xbdfe5d4f;
        auVar1373._24_4_ = 0xbdfe5d4f;
        auVar1373._28_4_ = 0xbdfe5d4f;
        auVar1427._8_4_ = 0x3e11e9bf;
        auVar1427._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1427._12_4_ = 0x3e11e9bf;
        auVar1427._16_4_ = 0x3e11e9bf;
        auVar1427._20_4_ = 0x3e11e9bf;
        auVar1427._24_4_ = 0x3e11e9bf;
        auVar1427._28_4_ = 0x3e11e9bf;
        auVar1481._8_4_ = 0xbe2aae50;
        auVar1481._0_8_ = 0xbe2aae50be2aae50;
        auVar1481._12_4_ = 0xbe2aae50;
        auVar1481._16_4_ = 0xbe2aae50;
        auVar1481._20_4_ = 0xbe2aae50;
        auVar1481._24_4_ = 0xbe2aae50;
        auVar1481._28_4_ = 0xbe2aae50;
        auVar1534._8_4_ = 0x3e4cceac;
        auVar1534._0_8_ = 0x3e4cceac3e4cceac;
        auVar1534._12_4_ = 0x3e4cceac;
        auVar1534._16_4_ = 0x3e4cceac;
        auVar1534._20_4_ = 0x3e4cceac;
        auVar1534._24_4_ = 0x3e4cceac;
        auVar1534._28_4_ = 0x3e4cceac;
        auVar1587._8_4_ = 0xbe7ffffc;
        auVar1587._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1587._12_4_ = 0xbe7ffffc;
        auVar1587._16_4_ = 0xbe7ffffc;
        auVar1587._20_4_ = 0xbe7ffffc;
        auVar1587._24_4_ = 0xbe7ffffc;
        auVar1587._28_4_ = 0xbe7ffffc;
        auVar495 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar444 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar558 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        uVar279 = vcmpps_avx512vl(auVar1594._0_32_,ZEXT1632(auVar287),2);
        auVar411 = vpcmpeqd_avx2(ZEXT1632(auVar287),ZEXT1632(auVar287));
        auVar499 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar502 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar503 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar424 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        in_ZMM29 = ZEXT3264(auVar424);
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          auVar164._8_4_ = 0x800000;
          auVar164._0_8_ = 0x80000000800000;
          auVar164._12_4_ = 0x800000;
          auVar164._16_4_ = 0x800000;
          auVar164._20_4_ = 0x800000;
          auVar164._24_4_ = 0x800000;
          auVar164._28_4_ = 0x800000;
          auVar425 = vmaxps_avx512vl(auVar1594._0_32_,auVar164);
          auVar418 = vpsrld_avx512vl(auVar425,0x17);
          auVar951._8_4_ = 0x807fffff;
          auVar951._0_8_ = 0x807fffff807fffff;
          auVar951._12_4_ = 0x807fffff;
          auVar951._16_4_ = 0x807fffff;
          auVar951._20_4_ = 0x807fffff;
          auVar951._24_4_ = 0x807fffff;
          auVar951._28_4_ = 0x807fffff;
          auVar165._8_4_ = 0x3f000000;
          auVar165._0_8_ = 0x3f0000003f000000;
          auVar165._12_4_ = 0x3f000000;
          auVar165._16_4_ = 0x3f000000;
          auVar165._20_4_ = 0x3f000000;
          auVar165._24_4_ = 0x3f000000;
          auVar165._28_4_ = 0x3f000000;
          auVar425 = vpternlogd_avx512vl(auVar425,auVar951,auVar165,0xea);
          uVar283 = vcmpps_avx512vl(auVar425,auVar1068,1);
          auVar427 = vaddps_avx512vl(auVar425,auVar1120);
          auVar425 = vaddps_avx512vl(auVar427,auVar425);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar536._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar427._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar536._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar427._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar536._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar427._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar536._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar427._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar536._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar427._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar536._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar427._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar536._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar427._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar536._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar427._28_4_;
          auVar427 = vmulps_avx512vl(auVar536,auVar536);
          auVar425 = vfmadd213ps_avx512vl(auVar896,auVar536,auVar1268);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar536,auVar1319);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar536,auVar1373);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar536,auVar1427);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar536,auVar1481);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar536,auVar1534);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar536,auVar1587);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar536,auVar495);
          auVar412 = vmulps_avx512vl(auVar427,auVar536);
          auVar221._4_4_ = auVar425._4_4_ * auVar412._4_4_;
          auVar221._0_4_ = auVar425._0_4_ * auVar412._0_4_;
          auVar221._8_4_ = auVar425._8_4_ * auVar412._8_4_;
          auVar221._12_4_ = auVar425._12_4_ * auVar412._12_4_;
          auVar221._16_4_ = auVar425._16_4_ * auVar412._16_4_;
          auVar221._20_4_ = auVar425._20_4_ * auVar412._20_4_;
          auVar221._24_4_ = auVar425._24_4_ * auVar412._24_4_;
          auVar221._28_4_ = auVar412._28_4_;
          auVar425 = vpaddd_avx512vl(auVar418,auVar1012);
          auVar425 = vcvtdq2ps_avx(auVar425);
          auVar418 = vsubps_avx512vl(auVar425,auVar1167);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar537._0_4_ = (uint)bVar281 * auVar418._0_4_ | (uint)!bVar281 * auVar425._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar537._4_4_ = (uint)bVar281 * auVar418._4_4_ | (uint)!bVar281 * auVar425._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar537._8_4_ = (uint)bVar281 * auVar418._8_4_ | (uint)!bVar281 * auVar425._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar537._12_4_ = (uint)bVar281 * auVar418._12_4_ | (uint)!bVar281 * auVar425._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar537._16_4_ = (uint)bVar281 * auVar418._16_4_ | (uint)!bVar281 * auVar425._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar537._20_4_ = (uint)bVar281 * auVar418._20_4_ | (uint)!bVar281 * auVar425._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar537._24_4_ = (uint)bVar281 * auVar418._24_4_ | (uint)!bVar281 * auVar425._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar537._28_4_ = (uint)bVar281 * auVar418._28_4_ | (uint)!bVar281 * auVar425._28_4_;
          auVar425 = vfmadd231ps_avx512vl(auVar221,auVar537,auVar444);
          auVar425 = vfmsub231ps_avx512vl(auVar425,auVar558,auVar427);
          auVar425 = vsubps_avx512vl(auVar425,auVar536);
          auVar425 = vfmsub231ps_avx512vl(auVar425,auVar498,auVar537);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar538._0_4_ = (uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar425._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar538._4_4_ = (uint)bVar281 * auVar411._4_4_ | (uint)!bVar281 * auVar425._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar538._8_4_ = (uint)bVar281 * auVar411._8_4_ | (uint)!bVar281 * auVar425._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar538._12_4_ = (uint)bVar281 * auVar411._12_4_ | (uint)!bVar281 * auVar425._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar538._16_4_ = (uint)bVar281 * auVar411._16_4_ | (uint)!bVar281 * auVar425._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar538._20_4_ = (uint)bVar281 * auVar411._20_4_ | (uint)!bVar281 * auVar425._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar538._24_4_ = (uint)bVar281 * auVar411._24_4_ | (uint)!bVar281 * auVar425._24_4_;
          bVar281 = SUB81(uVar279 >> 7,0);
          auVar538._28_4_ = (uint)bVar281 * auVar411._28_4_ | (uint)!bVar281 * auVar425._28_4_;
          fVar666 = *ptr1;
          auVar166._4_4_ = fVar666;
          auVar166._0_4_ = fVar666;
          auVar166._8_4_ = fVar666;
          auVar166._12_4_ = fVar666;
          auVar166._16_4_ = fVar666;
          auVar166._20_4_ = fVar666;
          auVar166._24_4_ = fVar666;
          auVar166._28_4_ = fVar666;
          auVar425 = vmulps_avx512vl(auVar538,auVar166);
          auVar425 = vminps_avx512vl(auVar425,auVar499);
          auVar425 = vmaxps_avx512vl(auVar425,auVar502);
          auVar418 = vfmadd231ps_avx512vl(auVar558,auVar425,auVar503);
          auVar427 = vrndscaleps_avx512vl(auVar418,1);
          uVar283 = vcmpps_avx512vl(auVar418,auVar427,1);
          auVar412 = vsubps_avx512vl(auVar427,auVar1167);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar539._0_4_ = (uint)bVar281 * auVar412._0_4_ | (uint)!bVar281 * auVar427._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar539._4_4_ = (uint)bVar281 * auVar412._4_4_ | (uint)!bVar281 * auVar427._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar539._8_4_ = (uint)bVar281 * auVar412._8_4_ | (uint)!bVar281 * auVar427._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar539._12_4_ = (uint)bVar281 * auVar412._12_4_ | (uint)!bVar281 * auVar427._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar539._16_4_ = (uint)bVar281 * auVar412._16_4_ | (uint)!bVar281 * auVar427._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar539._20_4_ = (uint)bVar281 * auVar412._20_4_ | (uint)!bVar281 * auVar427._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar539._24_4_ = (uint)bVar281 * auVar412._24_4_ | (uint)!bVar281 * auVar427._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar539._28_4_ = (uint)bVar281 * auVar412._28_4_ | (uint)!bVar281 * auVar427._28_4_;
          auVar425 = vfmsub231ps_avx512vl(auVar425,auVar539,auVar498);
          auVar425 = vfnmsub231ps_avx512vl(auVar425,auVar539,auVar444);
          auVar222._4_4_ = auVar425._4_4_ * auVar425._4_4_;
          auVar222._0_4_ = auVar425._0_4_ * auVar425._0_4_;
          auVar222._8_4_ = auVar425._8_4_ * auVar425._8_4_;
          auVar222._12_4_ = auVar425._12_4_ * auVar425._12_4_;
          auVar222._16_4_ = auVar425._16_4_ * auVar425._16_4_;
          auVar222._20_4_ = auVar425._20_4_ * auVar425._20_4_;
          auVar222._24_4_ = auVar425._24_4_ * auVar425._24_4_;
          auVar222._28_4_ = auVar418._28_4_;
          auVar418 = vfmadd213ps_avx512vl(auVar504,auVar425,auVar420);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar421);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar422);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar423);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar558);
          auVar425 = vfmadd213ps_avx512vl(auVar418,auVar222,auVar425);
          auVar418 = vcvttps2dq_avx512vl(auVar539);
          auVar418 = vpslld_avx2(auVar418,0x17);
          auVar418 = vpaddd_avx512vl(auVar418,auVar424);
          auVar425 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar418);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar425;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      afVar273 = _ps512_cephes_log_q2;
      afVar272 = _ps512_cephes_log_q1;
      afVar271 = _ps512_cephes_log_p8;
      afVar270 = _ps512_cephes_log_p7;
      afVar269 = _ps512_cephes_log_p6;
      afVar268 = _ps512_cephes_log_p5;
      afVar267 = _ps512_cephes_log_p4;
      afVar266 = _ps512_cephes_log_p3;
      afVar265 = _ps512_cephes_log_p2;
      afVar263 = ::_ps512_cephes_exp_p5;
      afVar262 = ::_ps512_cephes_exp_p4;
      afVar261 = ::_ps512_cephes_exp_p3;
      afVar260 = ::_ps512_cephes_exp_p2;
      afVar259 = ::_ps512_cephes_exp_p1;
      afVar258 = ::_ps512_cephes_exp_p0;
      afVar257 = ::_ps512_cephes_LOG2EF;
      afVar256 = ::_ps512_exp_lo;
      afVar255 = ::_ps512_exp_hi;
      afVar254 = ::_ps512_1;
      if (iVar276 != 4) {
        return;
      }
      auVar1594 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar287 = auVar1594._0_16_;
      auVar806._0_16_ = ZEXT116(0) * auVar287 + ZEXT116(1) * auVar287;
      auVar806._16_16_ = ZEXT116(0) * auVar1594._16_16_ + ZEXT116(1) * auVar287;
      auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar632 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar573 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar632);
      auVar650 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar632);
      auVar632 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar632);
      uVar282 = 0;
      uVar279 = vcmpps_avx512f(auVar1594,ZEXT1664(ZEXT816(0) << 0x40),2);
      auVar1594 = vmaxps_avx512f(auVar1594,(undefined1  [64])_ps512_min_norm_pos);
      auVar574 = vmovdqa64_avx512f((undefined1  [64])_ps512_inv_mant_mask);
      auVar574 = vpternlogd_avx512f(auVar574,auVar1594,(undefined1  [64])::_ps512_cephes_exp_p5,0xea
                                   );
      uVar283 = vcmpps_avx512f(auVar574,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      auVar575 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
      for (; (int)uVar282 + 3 < iVar278; uVar282 = uVar282 + 4) {
        auVar350 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar282 + 3]));
        auVar351 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar282 + 2]));
        auVar354 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar282 + 1]));
        fVar666 = ptr1[uVar282];
        auVar411 = vinsertf32x4_avx512vl(ZEXT1632(auVar351),auVar350,1);
        auVar495 = vinsertf32x4_avx512vl
                             (ZEXT1632(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(fVar666,fVar666))
                                                )),auVar354,1);
        auVar576 = vinsertf64x4_avx512f(ZEXT3264(auVar495),auVar411,1);
        auVar577 = vsubps_avx512f(auVar574,(undefined1  [64])afVar254);
        auVar578 = vaddps_avx512f(auVar577,auVar574);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar646._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar577._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar646._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar577._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar646._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar577._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar646._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar577._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar646._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar577._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar646._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar577._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar646._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar577._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar646._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar577._28_4_;
        bVar11 = (byte)(uVar283 >> 8);
        bVar281 = (bool)(bVar11 & 1);
        auVar646._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar577._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar646._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar577._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar646._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar577._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar646._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar577._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar646._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar577._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar646._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar577._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar646._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar577._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar646._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar577._60_4_;
        auVar577 = vmulps_avx512f(auVar646,auVar646);
        auVar578 = vfmadd132ps_avx512f(auVar646,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar646,(undefined1  [64])afVar265);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar646,(undefined1  [64])afVar266);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar646,(undefined1  [64])afVar267);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar646,(undefined1  [64])afVar268);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar646,(undefined1  [64])afVar269);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar646,(undefined1  [64])afVar270);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar646,(undefined1  [64])afVar271);
        auVar579 = vmulps_avx512f(auVar577,auVar646);
        auVar578 = vfmadd213ps_avx512f(auVar579,auVar578,auVar646);
        auVar579 = vpsrld_avx512f(auVar1594,0x17);
        auVar579 = vpsubd_avx512f(auVar579,auVar1595);
        auVar579 = vcvtdq2ps_avx512f(auVar579);
        auVar580 = vaddps_avx512f(auVar579,(undefined1  [64])afVar254);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar647._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar580._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar647._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar580._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar647._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar580._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar647._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar580._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar647._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar580._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar647._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar580._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar647._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar580._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar647._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar580._28_4_;
        bVar281 = (bool)(bVar11 & 1);
        auVar647._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar580._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar647._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar580._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar647._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar580._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar647._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar580._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar647._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar580._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar647._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar580._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar647._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar580._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar647._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar580._60_4_;
        auVar578 = vfmadd231ps_avx512f(auVar578,auVar647,(undefined1  [64])afVar272);
        auVar577 = vfmadd231ps_avx512f(auVar578,auVar573,auVar577);
        auVar577 = vfmadd231ps_avx512f(auVar577,(undefined1  [64])afVar273,auVar647);
        bVar281 = (bool)((byte)uVar279 & 1);
        auVar648._0_4_ = (uint)bVar281 * auVar575._0_4_ | (uint)!bVar281 * auVar577._0_4_;
        bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
        auVar648._4_4_ = (uint)bVar281 * auVar575._4_4_ | (uint)!bVar281 * auVar577._4_4_;
        bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
        auVar648._8_4_ = (uint)bVar281 * auVar575._8_4_ | (uint)!bVar281 * auVar577._8_4_;
        bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
        auVar648._12_4_ = (uint)bVar281 * auVar575._12_4_ | (uint)!bVar281 * auVar577._12_4_;
        bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
        auVar648._16_4_ = (uint)bVar281 * auVar575._16_4_ | (uint)!bVar281 * auVar577._16_4_;
        bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
        auVar648._20_4_ = (uint)bVar281 * auVar575._20_4_ | (uint)!bVar281 * auVar577._20_4_;
        bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
        auVar648._24_4_ = (uint)bVar281 * auVar575._24_4_ | (uint)!bVar281 * auVar577._24_4_;
        bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
        auVar648._28_4_ = (uint)bVar281 * auVar575._28_4_ | (uint)!bVar281 * auVar577._28_4_;
        bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
        auVar648._32_4_ = (uint)bVar281 * auVar575._32_4_ | (uint)!bVar281 * auVar577._32_4_;
        bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
        auVar648._36_4_ = (uint)bVar281 * auVar575._36_4_ | (uint)!bVar281 * auVar577._36_4_;
        bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
        auVar648._40_4_ = (uint)bVar281 * auVar575._40_4_ | (uint)!bVar281 * auVar577._40_4_;
        bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
        auVar648._44_4_ = (uint)bVar281 * auVar575._44_4_ | (uint)!bVar281 * auVar577._44_4_;
        bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
        auVar648._48_4_ = (uint)bVar281 * auVar575._48_4_ | (uint)!bVar281 * auVar577._48_4_;
        bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
        auVar648._52_4_ = (uint)bVar281 * auVar575._52_4_ | (uint)!bVar281 * auVar577._52_4_;
        bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
        auVar648._56_4_ = (uint)bVar281 * auVar575._56_4_ | (uint)!bVar281 * auVar577._56_4_;
        bVar281 = SUB81(uVar279 >> 0xf,0);
        auVar648._60_4_ = (uint)bVar281 * auVar575._60_4_ | (uint)!bVar281 * auVar577._60_4_;
        auVar576 = vmulps_avx512f(auVar648,auVar576);
        auVar576 = vminps_avx512f(auVar576,(undefined1  [64])afVar255);
        auVar576 = vmaxps_avx512f(auVar576,(undefined1  [64])afVar256);
        auVar577 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar576,
                                       (undefined1  [64])afVar263);
        auVar578 = vrndscaleps_avx512f(auVar577,1);
        uVar284 = vcmpps_avx512f(auVar577,auVar578,1);
        auVar577 = vsubps_avx512f(auVar578,(undefined1  [64])afVar254);
        bVar281 = (bool)((byte)uVar284 & 1);
        auVar649._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar578._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar649._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar578._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar649._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar578._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar649._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar578._12_4_;
        bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
        auVar649._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar578._16_4_;
        bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
        auVar649._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar578._20_4_;
        bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
        auVar649._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar578._24_4_;
        bVar281 = (bool)((byte)(uVar284 >> 7) & 1);
        auVar649._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar578._28_4_;
        bVar281 = (bool)((byte)(uVar284 >> 8) & 1);
        auVar649._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar578._32_4_;
        bVar281 = (bool)((byte)(uVar284 >> 9) & 1);
        auVar649._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar578._36_4_;
        bVar281 = (bool)((byte)(uVar284 >> 10) & 1);
        auVar649._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar578._40_4_;
        bVar281 = (bool)((byte)(uVar284 >> 0xb) & 1);
        auVar649._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar578._44_4_;
        bVar281 = (bool)((byte)(uVar284 >> 0xc) & 1);
        auVar649._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar578._48_4_;
        bVar281 = (bool)((byte)(uVar284 >> 0xd) & 1);
        auVar649._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar578._52_4_;
        bVar281 = (bool)((byte)(uVar284 >> 0xe) & 1);
        auVar649._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar578._56_4_;
        bVar281 = SUB81(uVar284 >> 0xf,0);
        auVar649._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar578._60_4_;
        auVar576 = vfmadd231ps_avx512f(auVar576,auVar649,auVar650);
        auVar576 = vfmadd231ps_avx512f(auVar576,auVar649,auVar632);
        auVar577 = vmulps_avx512f(auVar576,auVar576);
        auVar578 = vfmadd213ps_avx512f(auVar576,(undefined1  [64])afVar258,
                                       (undefined1  [64])afVar259);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar260);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar261);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar262);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar263);
        auVar576 = vfmadd213ps_avx512f(auVar578,auVar577,auVar576);
        auVar576 = vaddps_avx512f(auVar576,(undefined1  [64])afVar254);
        auVar577 = vcvttps2dq_avx512f(auVar649);
        auVar577 = vpaddd_avx512f(auVar577,auVar1595);
        auVar577 = vpslld_avx512f(auVar577,0x17);
        auVar576 = vmulps_avx512f(auVar576,auVar577);
        *(undefined1 (*) [64])outptr = auVar576;
        outptr = (float *)((long)outptr + 0x40);
      }
      auVar350 = ZEXT816(0) << 0x40;
      auVar1121._8_4_ = 0x3f3504f3;
      auVar1121._0_8_ = 0x3f3504f33f3504f3;
      auVar1121._12_4_ = 0x3f3504f3;
      auVar1121._16_4_ = 0x3f3504f3;
      auVar1121._20_4_ = 0x3f3504f3;
      auVar1121._24_4_ = 0x3f3504f3;
      auVar1121._28_4_ = 0x3f3504f3;
      auVar1168._8_4_ = 0xbf800000;
      auVar1168._0_8_ = 0xbf800000bf800000;
      auVar1168._12_4_ = 0xbf800000;
      auVar1168._16_4_ = 0xbf800000;
      auVar1168._20_4_ = 0xbf800000;
      auVar1168._24_4_ = 0xbf800000;
      auVar1168._28_4_ = 0xbf800000;
      auVar1218._8_4_ = 0x3f800000;
      auVar1218._0_8_ = 0x3f8000003f800000;
      auVar1218._12_4_ = 0x3f800000;
      auVar1218._16_4_ = 0x3f800000;
      auVar1218._20_4_ = 0x3f800000;
      auVar1218._24_4_ = 0x3f800000;
      auVar1218._28_4_ = 0x3f800000;
      auVar1013._8_4_ = 0x3d9021bb;
      auVar1013._0_8_ = 0x3d9021bb3d9021bb;
      auVar1013._12_4_ = 0x3d9021bb;
      auVar1013._16_4_ = 0x3d9021bb;
      auVar1013._20_4_ = 0x3d9021bb;
      auVar1013._24_4_ = 0x3d9021bb;
      auVar1013._28_4_ = 0x3d9021bb;
      auVar1320._8_4_ = 0xbdebd1b8;
      auVar1320._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1320._12_4_ = 0xbdebd1b8;
      auVar1320._16_4_ = 0xbdebd1b8;
      auVar1320._20_4_ = 0xbdebd1b8;
      auVar1320._24_4_ = 0xbdebd1b8;
      auVar1320._28_4_ = 0xbdebd1b8;
      auVar1374._8_4_ = 0x3def251a;
      auVar1374._0_8_ = 0x3def251a3def251a;
      auVar1374._12_4_ = 0x3def251a;
      auVar1374._16_4_ = 0x3def251a;
      auVar1374._20_4_ = 0x3def251a;
      auVar1374._24_4_ = 0x3def251a;
      auVar1374._28_4_ = 0x3def251a;
      auVar1428._8_4_ = 0xbdfe5d4f;
      auVar1428._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1428._12_4_ = 0xbdfe5d4f;
      auVar1428._16_4_ = 0xbdfe5d4f;
      auVar1428._20_4_ = 0xbdfe5d4f;
      auVar1428._24_4_ = 0xbdfe5d4f;
      auVar1428._28_4_ = 0xbdfe5d4f;
      auVar1482._8_4_ = 0x3e11e9bf;
      auVar1482._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1482._12_4_ = 0x3e11e9bf;
      auVar1482._16_4_ = 0x3e11e9bf;
      auVar1482._20_4_ = 0x3e11e9bf;
      auVar1482._24_4_ = 0x3e11e9bf;
      auVar1482._28_4_ = 0x3e11e9bf;
      auVar1535._8_4_ = 0xbe2aae50;
      auVar1535._0_8_ = 0xbe2aae50be2aae50;
      auVar1535._12_4_ = 0xbe2aae50;
      auVar1535._16_4_ = 0xbe2aae50;
      auVar1535._20_4_ = 0xbe2aae50;
      auVar1535._24_4_ = 0xbe2aae50;
      auVar1535._28_4_ = 0xbe2aae50;
      auVar1588._8_4_ = 0x3e4cceac;
      auVar1588._0_8_ = 0x3e4cceac3e4cceac;
      auVar1588._12_4_ = 0x3e4cceac;
      auVar1588._16_4_ = 0x3e4cceac;
      auVar1588._20_4_ = 0x3e4cceac;
      auVar1588._24_4_ = 0x3e4cceac;
      auVar1588._28_4_ = 0x3e4cceac;
      auVar495 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar558 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar499 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      uVar279 = vcmpps_avx512vl(auVar806,ZEXT1632(auVar350),2);
      auVar411 = vpcmpeqd_avx2(ZEXT1632(auVar350),ZEXT1632(auVar350));
      auVar502 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar503 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar420 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar424 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar425 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (; (int)uVar282 + 1 < iVar278; uVar282 = uVar282 + 2) {
        auVar350 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar282 + 1]));
        auVar351 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar282]));
        auVar427 = vinsertf32x4_avx512vl(ZEXT1632(auVar351),auVar350,1);
        auVar167._8_4_ = 0x800000;
        auVar167._0_8_ = 0x80000000800000;
        auVar167._12_4_ = 0x800000;
        auVar167._16_4_ = 0x800000;
        auVar167._20_4_ = 0x800000;
        auVar167._24_4_ = 0x800000;
        auVar167._28_4_ = 0x800000;
        auVar418 = vmaxps_avx512vl(auVar806,auVar167);
        auVar412 = vpsrld_avx512vl(auVar418,0x17);
        auVar952._8_4_ = 0x807fffff;
        auVar952._0_8_ = 0x807fffff807fffff;
        auVar952._12_4_ = 0x807fffff;
        auVar952._16_4_ = 0x807fffff;
        auVar952._20_4_ = 0x807fffff;
        auVar952._24_4_ = 0x807fffff;
        auVar952._28_4_ = 0x807fffff;
        auVar168._8_4_ = 0x3f000000;
        auVar168._0_8_ = 0x3f0000003f000000;
        auVar168._12_4_ = 0x3f000000;
        auVar168._16_4_ = 0x3f000000;
        auVar168._20_4_ = 0x3f000000;
        auVar168._24_4_ = 0x3f000000;
        auVar168._28_4_ = 0x3f000000;
        auVar418 = vpternlogd_avx512vl(auVar418,auVar952,auVar168,0xea);
        uVar283 = vcmpps_avx512vl(auVar418,auVar1121,1);
        auVar413 = vaddps_avx512vl(auVar418,auVar1168);
        auVar418 = vaddps_avx512vl(auVar413,auVar418);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar540._0_4_ = (uint)bVar281 * auVar418._0_4_ | (uint)!bVar281 * auVar413._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar540._4_4_ = (uint)bVar281 * auVar418._4_4_ | (uint)!bVar281 * auVar413._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar540._8_4_ = (uint)bVar281 * auVar418._8_4_ | (uint)!bVar281 * auVar413._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar540._12_4_ = (uint)bVar281 * auVar418._12_4_ | (uint)!bVar281 * auVar413._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar540._16_4_ = (uint)bVar281 * auVar418._16_4_ | (uint)!bVar281 * auVar413._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar540._20_4_ = (uint)bVar281 * auVar418._20_4_ | (uint)!bVar281 * auVar413._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar540._24_4_ = (uint)bVar281 * auVar418._24_4_ | (uint)!bVar281 * auVar413._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar540._28_4_ = (uint)bVar281 * auVar418._28_4_ | (uint)!bVar281 * auVar413._28_4_;
        auVar413 = vmulps_avx512vl(auVar540,auVar540);
        auVar350 = vfmadd213ps_fma(auVar1013,auVar540,auVar1320);
        auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar540,auVar1374);
        auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar540,auVar1428);
        auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar540,auVar1482);
        auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar540,auVar1535);
        auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar540,auVar1588);
        auVar418 = vfmadd213ps_avx512vl(ZEXT1632(auVar350),auVar540,auVar495);
        auVar418 = vfmadd213ps_avx512vl(auVar418,auVar540,auVar444);
        auVar419 = vmulps_avx512vl(auVar413,auVar540);
        auVar223._4_4_ = auVar418._4_4_ * auVar419._4_4_;
        auVar223._0_4_ = auVar418._0_4_ * auVar419._0_4_;
        auVar223._8_4_ = auVar418._8_4_ * auVar419._8_4_;
        auVar223._12_4_ = auVar418._12_4_ * auVar419._12_4_;
        auVar223._16_4_ = auVar418._16_4_ * auVar419._16_4_;
        auVar223._20_4_ = auVar418._20_4_ * auVar419._20_4_;
        auVar223._24_4_ = auVar418._24_4_ * auVar419._24_4_;
        auVar223._28_4_ = auVar419._28_4_;
        auVar169._8_4_ = 0xffffff82;
        auVar169._0_8_ = 0xffffff82ffffff82;
        auVar169._12_4_ = 0xffffff82;
        auVar169._16_4_ = 0xffffff82;
        auVar169._20_4_ = 0xffffff82;
        auVar169._24_4_ = 0xffffff82;
        auVar169._28_4_ = 0xffffff82;
        auVar418 = vpaddd_avx512vl(auVar412,auVar169);
        auVar418 = vcvtdq2ps_avx(auVar418);
        auVar412 = vsubps_avx512vl(auVar418,auVar1218);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar541._0_4_ = (uint)bVar281 * auVar412._0_4_ | (uint)!bVar281 * auVar418._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar541._4_4_ = (uint)bVar281 * auVar412._4_4_ | (uint)!bVar281 * auVar418._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar541._8_4_ = (uint)bVar281 * auVar412._8_4_ | (uint)!bVar281 * auVar418._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar541._12_4_ = (uint)bVar281 * auVar412._12_4_ | (uint)!bVar281 * auVar418._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar541._16_4_ = (uint)bVar281 * auVar412._16_4_ | (uint)!bVar281 * auVar418._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar541._20_4_ = (uint)bVar281 * auVar412._20_4_ | (uint)!bVar281 * auVar418._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar541._24_4_ = (uint)bVar281 * auVar412._24_4_ | (uint)!bVar281 * auVar418._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar541._28_4_ = (uint)bVar281 * auVar412._28_4_ | (uint)!bVar281 * auVar418._28_4_;
        auVar418 = vfmadd231ps_avx512vl(auVar223,auVar541,auVar558);
        auVar418 = vfmsub231ps_avx512vl(auVar418,auVar498,auVar413);
        auVar418 = vsubps_avx(auVar418,auVar540);
        auVar418 = vfmsub231ps_avx512vl(auVar418,auVar499,auVar541);
        bVar281 = (bool)((byte)uVar279 & 1);
        auVar542._0_4_ = (uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar418._0_4_;
        bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
        auVar542._4_4_ = (uint)bVar281 * auVar411._4_4_ | (uint)!bVar281 * auVar418._4_4_;
        bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
        auVar542._8_4_ = (uint)bVar281 * auVar411._8_4_ | (uint)!bVar281 * auVar418._8_4_;
        bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
        auVar542._12_4_ = (uint)bVar281 * auVar411._12_4_ | (uint)!bVar281 * auVar418._12_4_;
        bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
        auVar542._16_4_ = (uint)bVar281 * auVar411._16_4_ | (uint)!bVar281 * auVar418._16_4_;
        bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
        auVar542._20_4_ = (uint)bVar281 * auVar411._20_4_ | (uint)!bVar281 * auVar418._20_4_;
        bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
        auVar542._24_4_ = (uint)bVar281 * auVar411._24_4_ | (uint)!bVar281 * auVar418._24_4_;
        bVar281 = SUB81(uVar279 >> 7,0);
        auVar542._28_4_ = (uint)bVar281 * auVar411._28_4_ | (uint)!bVar281 * auVar418._28_4_;
        auVar418 = vmulps_avx512vl(auVar542,auVar427);
        auVar418 = vminps_avx512vl(auVar418,auVar502);
        auVar427 = vmaxps_avx512vl(auVar418,auVar503);
        auVar412 = vfmadd231ps_avx512vl(auVar498,auVar427,auVar504);
        auVar418 = vroundps_avx(auVar412,1);
        uVar283 = vcmpps_avx512vl(auVar412,auVar418,1);
        auVar413 = vsubps_avx512vl(auVar418,auVar1218);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar543._0_4_ = (float)((uint)bVar281 * auVar413._0_4_ | (uint)!bVar281 * auVar418._0_4_);
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar543._4_4_ = (float)((uint)bVar281 * auVar413._4_4_ | (uint)!bVar281 * auVar418._4_4_);
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar543._8_4_ = (float)((uint)bVar281 * auVar413._8_4_ | (uint)!bVar281 * auVar418._8_4_);
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar543._12_4_ =
             (float)((uint)bVar281 * auVar413._12_4_ | (uint)!bVar281 * auVar418._12_4_);
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar543._16_4_ =
             (float)((uint)bVar281 * auVar413._16_4_ | (uint)!bVar281 * auVar418._16_4_);
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar543._20_4_ =
             (float)((uint)bVar281 * auVar413._20_4_ | (uint)!bVar281 * auVar418._20_4_);
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar543._24_4_ =
             (float)((uint)bVar281 * auVar413._24_4_ | (uint)!bVar281 * auVar418._24_4_);
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar543._28_4_ =
             (float)((uint)bVar281 * auVar413._28_4_ | (uint)!bVar281 * auVar418._28_4_);
        auVar418 = vfmsub231ps_avx512vl(auVar427,auVar543,auVar499);
        auVar418 = vfnmsub231ps_avx512vl(auVar418,auVar543,auVar558);
        auVar224._4_4_ = auVar418._4_4_ * auVar418._4_4_;
        auVar224._0_4_ = auVar418._0_4_ * auVar418._0_4_;
        auVar224._8_4_ = auVar418._8_4_ * auVar418._8_4_;
        auVar224._12_4_ = auVar418._12_4_ * auVar418._12_4_;
        auVar224._16_4_ = auVar418._16_4_ * auVar418._16_4_;
        auVar224._20_4_ = auVar418._20_4_ * auVar418._20_4_;
        auVar224._24_4_ = auVar418._24_4_ * auVar418._24_4_;
        auVar224._28_4_ = auVar412._28_4_;
        auVar427 = vfmadd213ps_avx512vl(auVar420,auVar418,auVar421);
        auVar427 = vfmadd213ps_avx512vl(auVar427,auVar418,auVar422);
        auVar427 = vfmadd213ps_avx512vl(auVar427,auVar418,auVar423);
        auVar427 = vfmadd213ps_avx512vl(auVar427,auVar418,auVar424);
        auVar427 = vfmadd213ps_avx512vl(auVar427,auVar418,auVar498);
        auVar350 = vfmadd213ps_fma(auVar427,auVar224,auVar418);
        auVar897._0_4_ = (int)auVar543._0_4_;
        auVar897._4_4_ = (int)auVar543._4_4_;
        auVar897._8_4_ = (int)auVar543._8_4_;
        auVar897._12_4_ = (int)auVar543._12_4_;
        auVar897._16_4_ = (int)auVar543._16_4_;
        auVar897._20_4_ = (int)auVar543._20_4_;
        auVar897._24_4_ = (int)auVar543._24_4_;
        auVar897._28_4_ = (int)auVar543._28_4_;
        auVar418 = vpslld_avx2(auVar897,0x17);
        auVar418 = vpaddd_avx512vl(auVar418,auVar425);
        auVar350 = vfmadd213ps_fma(auVar418,ZEXT1632(auVar350),auVar418);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar350);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
      lVar280 = 0;
      uVar279 = vcmpps_avx512vl((undefined1  [16])0x0,auVar287,0xd);
      auVar925._8_4_ = 0x807fffff;
      auVar925._0_8_ = 0x807fffff807fffff;
      auVar925._12_4_ = 0x807fffff;
      auVar983._8_4_ = 0xffffff82;
      auVar983._0_8_ = 0xffffff82ffffff82;
      auVar983._12_4_ = 0xffffff82;
      auVar1037._8_4_ = 0x3f3504f3;
      auVar1037._0_8_ = 0x3f3504f33f3504f3;
      auVar1037._12_4_ = 0x3f3504f3;
      auVar1092._8_4_ = 0xbf800000;
      auVar1092._0_8_ = 0xbf800000bf800000;
      auVar1092._12_4_ = 0xbf800000;
      auVar1145._8_4_ = 0x3f800000;
      auVar1145._0_8_ = 0x3f8000003f800000;
      auVar1145._12_4_ = 0x3f800000;
      auVar351 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar1242._8_4_ = 0xbdebd1b8;
      auVar1242._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1242._12_4_ = 0xbdebd1b8;
      auVar1290._8_4_ = 0x3def251a;
      auVar1290._0_8_ = 0x3def251a3def251a;
      auVar1290._12_4_ = 0x3def251a;
      auVar1344._8_4_ = 0xbdfe5d4f;
      auVar1344._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1344._12_4_ = 0xbdfe5d4f;
      auVar1398._8_4_ = 0x3e11e9bf;
      auVar1398._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1398._12_4_ = 0x3e11e9bf;
      auVar1452._8_4_ = 0xbe2aae50;
      auVar1452._0_8_ = 0xbe2aae50be2aae50;
      auVar1452._12_4_ = 0xbe2aae50;
      auVar1505._8_4_ = 0x3e4cceac;
      auVar1505._0_8_ = 0x3e4cceac3e4cceac;
      auVar1505._12_4_ = 0x3e4cceac;
      auVar1558._8_4_ = 0xbe7ffffc;
      auVar1558._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1558._12_4_ = 0xbe7ffffc;
      auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar355 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar685._8_4_ = 0x3f000000;
      auVar685._0_8_ = 0x3f0000003f000000;
      auVar685._12_4_ = 0x3f000000;
      auVar356 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar359 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar360 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar395 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar396 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar296 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar299 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar350 = vpcmpeqd_avx(auVar806._0_16_,auVar806._0_16_);
      auVar300 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (uVar283 = uVar282 & 0xffffffff; (int)uVar283 < iVar278;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        auVar839._8_4_ = 0x800000;
        auVar839._0_8_ = 0x80000000800000;
        auVar839._12_4_ = 0x800000;
        auVar301 = vmaxps_avx512vl(auVar839,auVar287);
        auVar294 = vpsrld_avx512vl(auVar301,0x17);
        auVar84._8_4_ = 0x3f000000;
        auVar84._0_8_ = 0x3f0000003f000000;
        auVar84._12_4_ = 0x3f000000;
        auVar301 = vpternlogd_avx512vl(auVar301,auVar925,auVar84,0xea);
        uVar284 = vcmpps_avx512vl(auVar301,auVar1037,1);
        auVar303 = vaddps_avx512vl(auVar301,auVar1092);
        auVar301 = vaddps_avx512vl(auVar303,auVar301);
        bVar281 = (bool)((byte)uVar284 & 1);
        auVar383._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar303._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar383._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar303._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar383._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar303._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar383._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar303._12_4_;
        auVar303 = vmulps_avx512vl(auVar383,auVar383);
        auVar301 = vfmadd213ps_avx512vl(auVar351,auVar383,auVar1242);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar383,auVar1290);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar383,auVar1344);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar383,auVar1398);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar383,auVar1452);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar383,auVar1505);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar383,auVar1558);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar383,auVar354);
        auVar288 = vmulps_avx512vl(auVar303,auVar383);
        auVar840._0_4_ = auVar301._0_4_ * auVar288._0_4_;
        auVar840._4_4_ = auVar301._4_4_ * auVar288._4_4_;
        auVar840._8_4_ = auVar301._8_4_ * auVar288._8_4_;
        auVar840._12_4_ = auVar301._12_4_ * auVar288._12_4_;
        auVar301 = vpaddd_avx512vl(auVar294,auVar983);
        auVar301 = vcvtdq2ps_avx(auVar301);
        auVar294 = vsubps_avx512vl(auVar301,auVar1145);
        bVar281 = (bool)((byte)uVar284 & 1);
        auVar384._0_4_ = (uint)bVar281 * auVar294._0_4_ | (uint)!bVar281 * auVar301._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar384._4_4_ = (uint)bVar281 * auVar294._4_4_ | (uint)!bVar281 * auVar301._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar384._8_4_ = (uint)bVar281 * auVar294._8_4_ | (uint)!bVar281 * auVar301._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar384._12_4_ = (uint)bVar281 * auVar294._12_4_ | (uint)!bVar281 * auVar301._12_4_;
        auVar301 = vfmadd231ps_avx512vl(auVar840,auVar384,auVar355);
        auVar301 = vfmsub231ps_avx512vl(auVar301,auVar685,auVar303);
        auVar301 = vsubps_avx512vl(auVar301,auVar383);
        auVar301 = vfmsub231ps_avx512vl(auVar301,auVar356,auVar384);
        bVar281 = (bool)((byte)uVar279 & 1);
        auVar385._0_4_ = (uint)bVar281 * auVar350._0_4_ | (uint)!bVar281 * auVar301._0_4_;
        bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
        auVar385._4_4_ = (uint)bVar281 * auVar350._4_4_ | (uint)!bVar281 * auVar301._4_4_;
        bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
        auVar385._8_4_ = (uint)bVar281 * auVar350._8_4_ | (uint)!bVar281 * auVar301._8_4_;
        bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
        auVar385._12_4_ = (uint)bVar281 * auVar350._12_4_ | (uint)!bVar281 * auVar301._12_4_;
        uVar1603 = *(undefined4 *)((long)ptr1 + uVar282 * 4 + lVar280);
        auVar85._4_4_ = uVar1603;
        auVar85._0_4_ = uVar1603;
        auVar85._8_4_ = uVar1603;
        auVar85._12_4_ = uVar1603;
        auVar301 = vmulps_avx512vl(auVar385,auVar85);
        auVar301 = vminps_avx512vl(auVar301,auVar359);
        auVar301 = vmaxps_avx512vl(auVar301,auVar360);
        auVar294 = vfmadd231ps_avx512vl(auVar685,auVar301,auVar395);
        auVar303 = vcvttps2dq_avx512vl(auVar294);
        auVar303 = vcvtdq2ps_avx512vl(auVar303);
        uVar284 = vcmpps_avx512vl(auVar294,auVar303,1);
        auVar294 = vsubps_avx512vl(auVar303,auVar1145);
        bVar281 = (bool)((byte)uVar284 & 1);
        auVar386._0_4_ = (uint)bVar281 * auVar294._0_4_ | (uint)!bVar281 * auVar303._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar386._4_4_ = (uint)bVar281 * auVar294._4_4_ | (uint)!bVar281 * auVar303._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar386._8_4_ = (uint)bVar281 * auVar294._8_4_ | (uint)!bVar281 * auVar303._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar386._12_4_ = (uint)bVar281 * auVar294._12_4_ | (uint)!bVar281 * auVar303._12_4_;
        auVar301 = vfmsub231ps_avx512vl(auVar301,auVar386,auVar356);
        auVar301 = vfnmsub231ps_avx512vl(auVar301,auVar386,auVar355);
        auVar1192._0_4_ = auVar301._0_4_ * auVar301._0_4_;
        auVar1192._4_4_ = auVar301._4_4_ * auVar301._4_4_;
        auVar1192._8_4_ = auVar301._8_4_ * auVar301._8_4_;
        auVar1192._12_4_ = auVar301._12_4_ * auVar301._12_4_;
        auVar294 = vfmadd213ps_avx512vl(auVar396,auVar301,auVar296);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar297);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar298);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar299);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar685);
        auVar301 = vfmadd213ps_avx512vl(auVar294,auVar1192,auVar301);
        auVar294 = vcvttps2dq_avx512vl(auVar386);
        auVar294 = vpslld_avx(auVar294,0x17);
        auVar294 = vpaddd_avx512vl(auVar294,auVar300);
        auVar301 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar294);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar301;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw == bw) {
      auVar1594 = vmovdqa64_avx512f((undefined1  [64])::_ps512_1);
      auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
      auVar632 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar573 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar650 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
      auVar574 = vpxord_avx512f(auVar1595,auVar573);
      auVar575 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
      auVar576 = vpxord_avx512f(auVar575,auVar573);
      auVar573 = vpxord_avx512f(auVar650,auVar573);
      uVar279 = 0;
      auVar287 = vxorps_avx512vl(auVar287,auVar287);
      auVar577 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
      for (; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar578 = vmaxps_avx512f(*(undefined1 (*) [64])(ptr + uVar279),
                                  (undefined1  [64])_ps512_min_norm_pos);
        auVar579 = vpsrld_avx512f(auVar578,0x17);
        auVar578 = vpternlogd_avx512f(auVar578,auVar1595,(undefined1  [64])_ps512_inv_mant_mask,0xec
                                     );
        uVar283 = vcmpps_avx512f(auVar578,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar580 = vsubps_avx512f(auVar578,auVar1594);
        auVar578 = vaddps_avx512f(auVar580,auVar578);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar583._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar580._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar583._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar580._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar583._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar580._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar583._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar580._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar583._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar580._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar583._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar580._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar583._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar580._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar583._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar580._28_4_;
        bVar11 = (byte)(uVar283 >> 8);
        bVar281 = (bool)(bVar11 & 1);
        auVar583._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar580._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar583._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar580._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar583._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar580._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar583._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar580._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar583._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar580._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar583._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar580._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar583._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar580._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar583._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar580._60_4_;
        auVar578 = vmulps_avx512f(auVar583,auVar583);
        auVar580 = vfmadd132ps_avx512f(auVar583,(undefined1  [64])afVar266,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar583,(undefined1  [64])afVar267);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar583,(undefined1  [64])afVar268);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar583,(undefined1  [64])afVar269);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar583,(undefined1  [64])afVar270);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar583,(undefined1  [64])afVar271);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar583,(undefined1  [64])afVar272);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar583,(undefined1  [64])afVar273);
        auVar582 = vmulps_avx512f(auVar578,auVar583);
        auVar580 = vfmadd213ps_avx512f(auVar582,auVar580,auVar583);
        uVar282 = vcmpps_avx512f(*(undefined1 (*) [64])(ptr + uVar279),ZEXT1664(auVar287),2);
        auVar579 = vpsubd_avx512f(auVar579,auVar632);
        auVar579 = vcvtdq2ps_avx512f(auVar579);
        auVar582 = vaddps_avx512f(auVar579,auVar1594);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar584._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar582._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar584._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar582._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar584._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar582._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar584._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar582._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar584._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar582._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar584._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar582._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar584._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar582._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar584._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar582._28_4_;
        bVar281 = (bool)(bVar11 & 1);
        auVar584._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar582._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar584._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar582._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar584._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar582._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar584._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar582._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar584._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar582._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar584._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar582._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar584._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar582._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar584._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar582._60_4_;
        auVar579 = vfmadd231ps_avx512f(auVar580,auVar584,auVar650);
        auVar578 = vfmadd231ps_avx512f(auVar579,auVar574,auVar578);
        auVar578 = vfmadd231ps_avx512f(auVar578,auVar575,auVar584);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar585._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar578._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar585._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar578._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar585._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar578._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar585._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar578._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar585._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar578._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar585._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar578._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar585._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar578._24_4_;
        bVar281 = (bool)((byte)(uVar282 >> 7) & 1);
        auVar585._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar578._28_4_;
        bVar281 = (bool)((byte)(uVar282 >> 8) & 1);
        auVar585._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar578._32_4_;
        bVar281 = (bool)((byte)(uVar282 >> 9) & 1);
        auVar585._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar578._36_4_;
        bVar281 = (bool)((byte)(uVar282 >> 10) & 1);
        auVar585._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar578._40_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xb) & 1);
        auVar585._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar578._44_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xc) & 1);
        auVar585._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar578._48_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xd) & 1);
        auVar585._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar578._52_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xe) & 1);
        auVar585._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar578._56_4_;
        bVar281 = SUB81(uVar282 >> 0xf,0);
        auVar585._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar578._60_4_;
        auVar578 = vmulps_avx512f(auVar585,*(undefined1 (*) [64])(ptr1 + uVar279));
        auVar578 = vminps_avx512f(auVar578,(undefined1  [64])afVar255);
        auVar578 = vmaxps_avx512f(auVar578,(undefined1  [64])afVar256);
        auVar579 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar578,auVar1595);
        auVar580 = vrndscaleps_avx512f(auVar579,1);
        uVar283 = vcmpps_avx512f(auVar579,auVar580,1);
        auVar579 = vsubps_avx512f(auVar580,auVar1594);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar586._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar580._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar586._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar580._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar586._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar580._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar586._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar580._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar586._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar580._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar586._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar580._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar586._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar580._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar586._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar580._28_4_;
        bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
        auVar586._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar580._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar586._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar580._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar586._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar580._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar586._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar580._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar586._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar580._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar586._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar580._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar586._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar580._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar586._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar580._60_4_;
        auVar578 = vfmadd231ps_avx512f(auVar578,auVar586,auVar576);
        auVar578 = vfmadd231ps_avx512f(auVar578,auVar586,auVar573);
        auVar579 = vmulps_avx512f(auVar578,auVar578);
        auVar580 = vfmadd213ps_avx512f(auVar578,(undefined1  [64])afVar258,
                                       (undefined1  [64])afVar259);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar260);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar261);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar262);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,auVar1595);
        auVar578 = vfmadd213ps_avx512f(auVar580,auVar579,auVar578);
        auVar578 = vaddps_avx512f(auVar578,auVar1594);
        auVar579 = vcvttps2dq_avx512f(auVar586);
        auVar579 = vpaddd_avx512f(auVar579,auVar632);
        auVar579 = vpslld_avx512f(auVar579,0x17);
        auVar578 = vmulps_avx512f(auVar578,auVar579);
        *(undefined1 (*) [64])(outptr + uVar279) = auVar578;
      }
      auVar932._8_4_ = 0xffffff82;
      auVar932._0_8_ = 0xffffff82ffffff82;
      auVar932._12_4_ = 0xffffff82;
      auVar932._16_4_ = 0xffffff82;
      auVar932._20_4_ = 0xffffff82;
      auVar932._24_4_ = 0xffffff82;
      auVar932._28_4_ = 0xffffff82;
      auVar990._8_4_ = 0x3f3504f3;
      auVar990._0_8_ = 0x3f3504f33f3504f3;
      auVar990._12_4_ = 0x3f3504f3;
      auVar990._16_4_ = 0x3f3504f3;
      auVar990._20_4_ = 0x3f3504f3;
      auVar990._24_4_ = 0x3f3504f3;
      auVar990._28_4_ = 0x3f3504f3;
      auVar1044._8_4_ = 0xbf800000;
      auVar1044._0_8_ = 0xbf800000bf800000;
      auVar1044._12_4_ = 0xbf800000;
      auVar1044._16_4_ = 0xbf800000;
      auVar1044._20_4_ = 0xbf800000;
      auVar1044._24_4_ = 0xbf800000;
      auVar1044._28_4_ = 0xbf800000;
      auVar1099._8_4_ = 0x3f800000;
      auVar1099._0_8_ = 0x3f8000003f800000;
      auVar1099._12_4_ = 0x3f800000;
      auVar1099._16_4_ = 0x3f800000;
      auVar1099._20_4_ = 0x3f800000;
      auVar1099._24_4_ = 0x3f800000;
      auVar1099._28_4_ = 0x3f800000;
      auVar773._8_4_ = 0x3d9021bb;
      auVar773._0_8_ = 0x3d9021bb3d9021bb;
      auVar773._12_4_ = 0x3d9021bb;
      auVar773._16_4_ = 0x3d9021bb;
      auVar773._20_4_ = 0x3d9021bb;
      auVar773._24_4_ = 0x3d9021bb;
      auVar773._28_4_ = 0x3d9021bb;
      auVar1199._8_4_ = 0xbdebd1b8;
      auVar1199._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1199._12_4_ = 0xbdebd1b8;
      auVar1199._16_4_ = 0xbdebd1b8;
      auVar1199._20_4_ = 0xbdebd1b8;
      auVar1199._24_4_ = 0xbdebd1b8;
      auVar1199._28_4_ = 0xbdebd1b8;
      auVar1249._8_4_ = 0x3def251a;
      auVar1249._0_8_ = 0x3def251a3def251a;
      auVar1249._12_4_ = 0x3def251a;
      auVar1249._16_4_ = 0x3def251a;
      auVar1249._20_4_ = 0x3def251a;
      auVar1249._24_4_ = 0x3def251a;
      auVar1249._28_4_ = 0x3def251a;
      auVar1297._8_4_ = 0xbdfe5d4f;
      auVar1297._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1297._12_4_ = 0xbdfe5d4f;
      auVar1297._16_4_ = 0xbdfe5d4f;
      auVar1297._20_4_ = 0xbdfe5d4f;
      auVar1297._24_4_ = 0xbdfe5d4f;
      auVar1297._28_4_ = 0xbdfe5d4f;
      auVar1351._8_4_ = 0x3e11e9bf;
      auVar1351._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1351._12_4_ = 0x3e11e9bf;
      auVar1351._16_4_ = 0x3e11e9bf;
      auVar1351._20_4_ = 0x3e11e9bf;
      auVar1351._24_4_ = 0x3e11e9bf;
      auVar1351._28_4_ = 0x3e11e9bf;
      auVar1405._8_4_ = 0xbe2aae50;
      auVar1405._0_8_ = 0xbe2aae50be2aae50;
      auVar1405._12_4_ = 0xbe2aae50;
      auVar1405._16_4_ = 0xbe2aae50;
      auVar1405._20_4_ = 0xbe2aae50;
      auVar1405._24_4_ = 0xbe2aae50;
      auVar1405._28_4_ = 0xbe2aae50;
      auVar1459._8_4_ = 0x3e4cceac;
      auVar1459._0_8_ = 0x3e4cceac3e4cceac;
      auVar1459._12_4_ = 0x3e4cceac;
      auVar1459._16_4_ = 0x3e4cceac;
      auVar1459._20_4_ = 0x3e4cceac;
      auVar1459._24_4_ = 0x3e4cceac;
      auVar1459._28_4_ = 0x3e4cceac;
      auVar1512._8_4_ = 0xbe7ffffc;
      auVar1512._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1512._12_4_ = 0xbe7ffffc;
      auVar1512._16_4_ = 0xbe7ffffc;
      auVar1512._20_4_ = 0xbe7ffffc;
      auVar1512._24_4_ = 0xbe7ffffc;
      auVar1512._28_4_ = 0xbe7ffffc;
      auVar1565._8_4_ = 0x3eaaaaaa;
      auVar1565._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar1565._12_4_ = 0x3eaaaaaa;
      auVar1565._16_4_ = 0x3eaaaaaa;
      auVar1565._20_4_ = 0x3eaaaaaa;
      auVar1565._24_4_ = 0x3eaaaaaa;
      auVar1565._28_4_ = 0x3eaaaaaa;
      auVar495 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar558 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar287 = vxorps_avx512vl(auVar354,auVar354);
      auVar411 = vpcmpeqd_avx2(auVar1594._0_32_,auVar1594._0_32_);
      auVar498 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar499 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar502 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar503 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar423 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        uVar283 = vcmpps_avx512vl(*(undefined1 (*) [32])(ptr + uVar279),ZEXT1632(auVar287),2);
        auVar149._8_4_ = 0x800000;
        auVar149._0_8_ = 0x80000000800000;
        auVar149._12_4_ = 0x800000;
        auVar149._16_4_ = 0x800000;
        auVar149._20_4_ = 0x800000;
        auVar149._24_4_ = 0x800000;
        auVar149._28_4_ = 0x800000;
        auVar424 = vmaxps_avx512vl(*(undefined1 (*) [32])(ptr + uVar279),auVar149);
        auVar425 = vpsrld_avx512vl(auVar424,0x17);
        auVar849._8_4_ = 0x807fffff;
        auVar849._0_8_ = 0x807fffff807fffff;
        auVar849._12_4_ = 0x807fffff;
        auVar849._16_4_ = 0x807fffff;
        auVar849._20_4_ = 0x807fffff;
        auVar849._24_4_ = 0x807fffff;
        auVar849._28_4_ = 0x807fffff;
        auVar150._8_4_ = 0x3f000000;
        auVar150._0_8_ = 0x3f0000003f000000;
        auVar150._12_4_ = 0x3f000000;
        auVar150._16_4_ = 0x3f000000;
        auVar150._20_4_ = 0x3f000000;
        auVar150._24_4_ = 0x3f000000;
        auVar150._28_4_ = 0x3f000000;
        auVar424 = vpternlogd_avx512vl(auVar424,auVar849,auVar150,0xea);
        uVar282 = vcmpps_avx512vl(auVar424,auVar990,1);
        auVar418 = vaddps_avx512vl(auVar424,auVar1044);
        auVar424 = vaddps_avx512vl(auVar418,auVar424);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar430._0_4_ = (uint)bVar281 * auVar424._0_4_ | (uint)!bVar281 * auVar418._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar430._4_4_ = (uint)bVar281 * auVar424._4_4_ | (uint)!bVar281 * auVar418._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar430._8_4_ = (uint)bVar281 * auVar424._8_4_ | (uint)!bVar281 * auVar418._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar430._12_4_ = (uint)bVar281 * auVar424._12_4_ | (uint)!bVar281 * auVar418._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar430._16_4_ = (uint)bVar281 * auVar424._16_4_ | (uint)!bVar281 * auVar418._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar430._20_4_ = (uint)bVar281 * auVar424._20_4_ | (uint)!bVar281 * auVar418._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar430._24_4_ = (uint)bVar281 * auVar424._24_4_ | (uint)!bVar281 * auVar418._24_4_;
        bVar281 = SUB81(uVar282 >> 7,0);
        auVar430._28_4_ = (uint)bVar281 * auVar424._28_4_ | (uint)!bVar281 * auVar418._28_4_;
        auVar418 = vmulps_avx512vl(auVar430,auVar430);
        auVar424 = vfmadd213ps_avx512vl(auVar773,auVar430,auVar1199);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar430,auVar1249);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar430,auVar1297);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar430,auVar1351);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar430,auVar1405);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar430,auVar1459);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar430,auVar1512);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar430,auVar1565);
        auVar427 = vmulps_avx512vl(auVar418,auVar430);
        auVar189._4_4_ = auVar427._4_4_ * auVar424._4_4_;
        auVar189._0_4_ = auVar427._0_4_ * auVar424._0_4_;
        auVar189._8_4_ = auVar427._8_4_ * auVar424._8_4_;
        auVar189._12_4_ = auVar427._12_4_ * auVar424._12_4_;
        auVar189._16_4_ = auVar427._16_4_ * auVar424._16_4_;
        auVar189._20_4_ = auVar427._20_4_ * auVar424._20_4_;
        auVar189._24_4_ = auVar427._24_4_ * auVar424._24_4_;
        auVar189._28_4_ = auVar427._28_4_;
        auVar424 = vpaddd_avx512vl(auVar425,auVar932);
        auVar424 = vcvtdq2ps_avx(auVar424);
        auVar425 = vsubps_avx512vl(auVar424,auVar1099);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar431._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar424._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar431._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar424._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar431._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar424._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar431._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar424._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar431._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar424._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar431._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar424._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar431._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar424._24_4_;
        bVar281 = SUB81(uVar282 >> 7,0);
        auVar431._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar424._28_4_;
        auVar424 = vfmadd231ps_avx512vl(auVar189,auVar431,auVar495);
        auVar424 = vfmsub231ps_avx512vl(auVar424,auVar444,auVar418);
        auVar424 = vsubps_avx512vl(auVar424,auVar430);
        auVar424 = vfmsub231ps_avx512vl(auVar424,auVar558,auVar431);
        bVar281 = (bool)((byte)uVar283 & 1);
        bVar12 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar283 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar283 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar283 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar283 >> 6) & 1);
        bVar18 = SUB81(uVar283 >> 7,0);
        pfVar1599 = ptr1 + uVar279;
        auVar190._4_4_ =
             (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar424._4_4_) * pfVar1599[1];
        auVar190._0_4_ =
             (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar424._0_4_) * *pfVar1599;
        auVar190._8_4_ =
             (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar424._8_4_) * pfVar1599[2];
        auVar190._12_4_ =
             (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar424._12_4_) *
             pfVar1599[3];
        auVar190._16_4_ =
             (float)((uint)bVar15 * auVar411._16_4_ | (uint)!bVar15 * auVar424._16_4_) *
             pfVar1599[4];
        auVar190._20_4_ =
             (float)((uint)bVar16 * auVar411._20_4_ | (uint)!bVar16 * auVar424._20_4_) *
             pfVar1599[5];
        auVar190._24_4_ =
             (float)((uint)bVar17 * auVar411._24_4_ | (uint)!bVar17 * auVar424._24_4_) *
             pfVar1599[6];
        auVar190._28_4_ = (uint)bVar18 * auVar411._28_4_ | (uint)!bVar18 * auVar424._28_4_;
        auVar424 = vminps_avx512vl(auVar190,auVar498);
        auVar424 = vmaxps_avx512vl(auVar424,auVar499);
        auVar425 = vfmadd231ps_avx512vl(auVar444,auVar424,auVar502);
        auVar418 = vrndscaleps_avx512vl(auVar425,1);
        uVar283 = vcmpps_avx512vl(auVar425,auVar418,1);
        auVar427 = vsubps_avx512vl(auVar418,auVar1099);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar432._0_4_ = (uint)bVar281 * auVar427._0_4_ | (uint)!bVar281 * auVar418._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar432._4_4_ = (uint)bVar281 * auVar427._4_4_ | (uint)!bVar281 * auVar418._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar432._8_4_ = (uint)bVar281 * auVar427._8_4_ | (uint)!bVar281 * auVar418._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar432._12_4_ = (uint)bVar281 * auVar427._12_4_ | (uint)!bVar281 * auVar418._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar432._16_4_ = (uint)bVar281 * auVar427._16_4_ | (uint)!bVar281 * auVar418._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar432._20_4_ = (uint)bVar281 * auVar427._20_4_ | (uint)!bVar281 * auVar418._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar432._24_4_ = (uint)bVar281 * auVar427._24_4_ | (uint)!bVar281 * auVar418._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar432._28_4_ = (uint)bVar281 * auVar427._28_4_ | (uint)!bVar281 * auVar418._28_4_;
        auVar424 = vfmsub231ps_avx512vl(auVar424,auVar432,auVar558);
        auVar424 = vfnmsub231ps_avx512vl(auVar424,auVar432,auVar495);
        auVar191._4_4_ = auVar424._4_4_ * auVar424._4_4_;
        auVar191._0_4_ = auVar424._0_4_ * auVar424._0_4_;
        auVar191._8_4_ = auVar424._8_4_ * auVar424._8_4_;
        auVar191._12_4_ = auVar424._12_4_ * auVar424._12_4_;
        auVar191._16_4_ = auVar424._16_4_ * auVar424._16_4_;
        auVar191._20_4_ = auVar424._20_4_ * auVar424._20_4_;
        auVar191._24_4_ = auVar424._24_4_ * auVar424._24_4_;
        auVar191._28_4_ = auVar425._28_4_;
        auVar425 = vfmadd213ps_avx512vl(auVar503,auVar424,auVar504);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar420);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar421);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar422);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar444);
        auVar424 = vfmadd213ps_avx512vl(auVar425,auVar191,auVar424);
        auVar425 = vcvttps2dq_avx512vl(auVar432);
        auVar425 = vpslld_avx2(auVar425,0x17);
        auVar425 = vpaddd_avx512vl(auVar425,auVar423);
        auVar424 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar425);
        *(undefined1 (*) [32])(outptr + uVar279) = auVar424;
      }
      auVar910._8_4_ = 0xffffff82;
      auVar910._0_8_ = 0xffffff82ffffff82;
      auVar910._12_4_ = 0xffffff82;
      auVar963._8_4_ = 0x3f3504f3;
      auVar963._0_8_ = 0x3f3504f33f3504f3;
      auVar963._12_4_ = 0x3f3504f3;
      auVar1021._8_4_ = 0xbf800000;
      auVar1021._0_8_ = 0xbf800000bf800000;
      auVar1021._12_4_ = 0xbf800000;
      auVar1076._8_4_ = 0x3f800000;
      auVar1076._0_8_ = 0x3f8000003f800000;
      auVar1076._12_4_ = 0x3f800000;
      auVar732._8_4_ = 0x3d9021bb;
      auVar732._0_8_ = 0x3d9021bb3d9021bb;
      auVar732._12_4_ = 0x3d9021bb;
      auVar1176._8_4_ = 0xbdebd1b8;
      auVar1176._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1176._12_4_ = 0xbdebd1b8;
      auVar1226._8_4_ = 0x3def251a;
      auVar1226._0_8_ = 0x3def251a3def251a;
      auVar1226._12_4_ = 0x3def251a;
      auVar1274._8_4_ = 0xbdfe5d4f;
      auVar1274._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1274._12_4_ = 0xbdfe5d4f;
      auVar1328._8_4_ = 0x3e11e9bf;
      auVar1328._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1328._12_4_ = 0x3e11e9bf;
      auVar1382._8_4_ = 0xbe2aae50;
      auVar1382._0_8_ = 0xbe2aae50be2aae50;
      auVar1382._12_4_ = 0xbe2aae50;
      auVar1436._8_4_ = 0x3e4cceac;
      auVar1436._0_8_ = 0x3e4cceac3e4cceac;
      auVar1436._12_4_ = 0x3e4cceac;
      auVar1490._8_4_ = 0xbe7ffffc;
      auVar1490._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1490._12_4_ = 0xbe7ffffc;
      auVar1543._8_4_ = 0x3eaaaaaa;
      auVar1543._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar1543._12_4_ = 0x3eaaaaaa;
      auVar350 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar351 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar355 = vxorps_avx512vl(auVar287,auVar287);
      auVar287 = vpcmpeqd_avx(auVar411._0_16_,auVar411._0_16_);
      auVar356 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar359 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar395 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar396 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar296 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar299 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        uVar283 = vcmpps_avx512vl(*(undefined1 (*) [16])(ptr + uVar279),auVar355,2);
        auVar73._8_4_ = 0x800000;
        auVar73._0_8_ = 0x80000000800000;
        auVar73._12_4_ = 0x800000;
        auVar300 = vmaxps_avx512vl(*(undefined1 (*) [16])(ptr + uVar279),auVar73);
        auVar301 = vpsrld_avx512vl(auVar300,0x17);
        auVar816._8_4_ = 0x807fffff;
        auVar816._0_8_ = 0x807fffff807fffff;
        auVar816._12_4_ = 0x807fffff;
        auVar74._8_4_ = 0x3f000000;
        auVar74._0_8_ = 0x3f0000003f000000;
        auVar74._12_4_ = 0x3f000000;
        auVar300 = vpternlogd_avx512vl(auVar300,auVar816,auVar74,0xea);
        uVar282 = vcmpps_avx512vl(auVar300,auVar963,1);
        auVar294 = vaddps_avx512vl(auVar300,auVar1021);
        auVar300 = vaddps_avx512vl(auVar294,auVar300);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar306._0_4_ = (uint)bVar281 * auVar300._0_4_ | (uint)!bVar281 * auVar294._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar306._4_4_ = (uint)bVar281 * auVar300._4_4_ | (uint)!bVar281 * auVar294._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar306._8_4_ = (uint)bVar281 * auVar300._8_4_ | (uint)!bVar281 * auVar294._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar306._12_4_ = (uint)bVar281 * auVar300._12_4_ | (uint)!bVar281 * auVar294._12_4_;
        auVar294 = vmulps_avx512vl(auVar306,auVar306);
        auVar300 = vfmadd213ps_avx512vl(auVar732,auVar306,auVar1176);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar306,auVar1226);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar306,auVar1274);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar306,auVar1328);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar306,auVar1382);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar306,auVar1436);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar306,auVar1490);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar306,auVar1543);
        auVar303 = vmulps_avx512vl(auVar294,auVar306);
        auVar817._0_4_ = auVar303._0_4_ * auVar300._0_4_;
        auVar817._4_4_ = auVar303._4_4_ * auVar300._4_4_;
        auVar817._8_4_ = auVar303._8_4_ * auVar300._8_4_;
        auVar817._12_4_ = auVar303._12_4_ * auVar300._12_4_;
        auVar300 = vpaddd_avx512vl(auVar301,auVar910);
        auVar300 = vcvtdq2ps_avx(auVar300);
        auVar301 = vsubps_avx512vl(auVar300,auVar1076);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar307._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar300._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar307._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar300._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar307._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar300._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar307._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar300._12_4_;
        auVar300 = vfmadd231ps_avx512vl(auVar817,auVar307,auVar350);
        auVar300 = vfmsub231ps_avx512vl(auVar300,auVar351,auVar294);
        auVar300 = vsubps_avx512vl(auVar300,auVar306);
        auVar300 = vfmsub231ps_avx512vl(auVar300,auVar354,auVar307);
        bVar281 = (bool)((byte)uVar283 & 1);
        bVar12 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar283 >> 3) & 1);
        pfVar1599 = ptr1 + uVar279;
        auVar818._0_4_ =
             (float)((uint)bVar281 * auVar287._0_4_ | (uint)!bVar281 * auVar300._0_4_) * *pfVar1599;
        auVar818._4_4_ =
             (float)((uint)bVar12 * auVar287._4_4_ | (uint)!bVar12 * auVar300._4_4_) * pfVar1599[1];
        auVar818._8_4_ =
             (float)((uint)bVar13 * auVar287._8_4_ | (uint)!bVar13 * auVar300._8_4_) * pfVar1599[2];
        auVar818._12_4_ =
             (float)((uint)bVar14 * auVar287._12_4_ | (uint)!bVar14 * auVar300._12_4_) *
             pfVar1599[3];
        auVar300 = vminps_avx512vl(auVar818,auVar356);
        auVar300 = vmaxps_avx512vl(auVar300,auVar359);
        auVar301 = vfmadd231ps_avx512vl(auVar351,auVar300,auVar360);
        auVar294 = vcvttps2dq_avx512vl(auVar301);
        auVar294 = vcvtdq2ps_avx512vl(auVar294);
        uVar283 = vcmpps_avx512vl(auVar301,auVar294,1);
        auVar301 = vsubps_avx512vl(auVar294,auVar1076);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar308._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar294._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar308._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar294._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar308._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar294._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar308._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar294._12_4_;
        auVar300 = vfmsub231ps_avx512vl(auVar300,auVar308,auVar354);
        auVar300 = vfnmsub231ps_avx512vl(auVar300,auVar308,auVar350);
        auVar1129._0_4_ = auVar300._0_4_ * auVar300._0_4_;
        auVar1129._4_4_ = auVar300._4_4_ * auVar300._4_4_;
        auVar1129._8_4_ = auVar300._8_4_ * auVar300._8_4_;
        auVar1129._12_4_ = auVar300._12_4_ * auVar300._12_4_;
        auVar301 = vfmadd213ps_avx512vl(auVar395,auVar300,auVar396);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar296);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar297);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar298);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar351);
        auVar300 = vfmadd213ps_avx512vl(auVar301,auVar1129,auVar300);
        auVar301 = vcvttps2dq_avx512vl(auVar308);
        auVar301 = vpslld_avx(auVar301,0x17);
        auVar301 = vpaddd_avx512vl(auVar301,auVar299);
        auVar300 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar301);
        *(undefined1 (*) [16])(outptr + uVar279) = auVar300;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        pfVar1599 = outptr;
        fVar666 = powf(*(float *)((long)ptr + uVar279 * 4 + lVar280),
                       *(float *)((long)ptr1 + uVar279 * 4 + lVar280));
        *(float *)((long)outptr + uVar279 * 4 + lVar280) = fVar666;
        lVar280 = lVar280 + 4;
        outptr = pfVar1599;
      }
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_00381abd;
      fVar666 = *ptr;
      if (iVar276 == 4) {
        _local_f8 = *(undefined1 (*) [16])ptr;
        auVar1594 = ZEXT3264(CONCAT1616(_local_f8,_local_f8));
      }
      else {
        local_f8._4_4_ = fVar666;
        local_f8._0_4_ = fVar666;
        fStack_f0 = fVar666;
        fStack_ec = fVar666;
        if (iVar276 == 8) {
          auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar811._4_4_ = fVar666;
          auVar811._0_4_ = fVar666;
          auVar811._8_4_ = fVar666;
          auVar811._12_4_ = fVar666;
          auVar811._16_4_ = fVar666;
          auVar811._20_4_ = fVar666;
          auVar811._24_4_ = fVar666;
          auVar811._28_4_ = fVar666;
          auVar1594 = ZEXT3264(auVar811);
          if (iVar276 == 0x10) {
            auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_0038b7f7;
          }
        }
      }
      auVar811 = auVar1594._0_32_;
      auVar1594 = vinserti64x4_avx512f(auVar1594,auVar811,1);
LAB_0038b7f7:
      auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
      auVar632 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar573 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
      auVar650 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar574 = vpxord_avx512f(auVar1595,auVar650);
      auVar575 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
      auVar576 = vpxord_avx512f(auVar575,auVar650);
      auVar650 = vpxord_avx512f(auVar573,auVar650);
      uVar282 = 0;
      auVar287 = vxorps_avx512vl(auVar287,auVar287);
      uVar279 = vcmpps_avx512f(auVar1594,ZEXT1664(auVar287),2);
      auVar1594 = vmaxps_avx512f(auVar1594,(undefined1  [64])_ps512_min_norm_pos);
      auVar577 = vmovdqa64_avx512f((undefined1  [64])_ps512_inv_mant_mask);
      auVar577 = vpternlogd_avx512f(auVar577,auVar1594,auVar1595,0xea);
      uVar283 = vcmpps_avx512f(auVar577,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      auVar578 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
      for (; (int)uVar282 + 0xf < iVar277; uVar282 = uVar282 + 0x10) {
        auVar579 = vsubps_avx512f(auVar577,(undefined1  [64])afVar254);
        auVar580 = vaddps_avx512f(auVar579,auVar577);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar655._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar579._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar655._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar579._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar655._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar579._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar655._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar579._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar655._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar579._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar655._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar579._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar655._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar579._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar655._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar579._28_4_;
        bVar11 = (byte)(uVar283 >> 8);
        bVar281 = (bool)(bVar11 & 1);
        auVar655._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar579._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar655._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar579._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar655._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar579._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar655._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar579._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar655._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar579._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar655._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar579._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar655._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar579._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar655._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar579._60_4_;
        auVar579 = vmulps_avx512f(auVar655,auVar655);
        auVar580 = vfmadd132ps_avx512f(auVar655,(undefined1  [64])afVar266,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar655,(undefined1  [64])afVar267);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar655,(undefined1  [64])afVar268);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar655,(undefined1  [64])afVar269);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar655,(undefined1  [64])afVar270);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar655,(undefined1  [64])afVar271);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar655,(undefined1  [64])afVar272);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar655,(undefined1  [64])afVar273);
        auVar582 = vmulps_avx512f(auVar579,auVar655);
        auVar580 = vfmadd213ps_avx512f(auVar582,auVar580,auVar655);
        auVar582 = vpsrld_avx512f(auVar1594,0x17);
        auVar582 = vpsubd_avx512f(auVar582,auVar632);
        auVar582 = vcvtdq2ps_avx512f(auVar582);
        auVar581 = vaddps_avx512f(auVar582,(undefined1  [64])afVar254);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar656._0_4_ = (uint)bVar281 * auVar582._0_4_ | (uint)!bVar281 * auVar581._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar656._4_4_ = (uint)bVar281 * auVar582._4_4_ | (uint)!bVar281 * auVar581._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar656._8_4_ = (uint)bVar281 * auVar582._8_4_ | (uint)!bVar281 * auVar581._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar656._12_4_ = (uint)bVar281 * auVar582._12_4_ | (uint)!bVar281 * auVar581._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar656._16_4_ = (uint)bVar281 * auVar582._16_4_ | (uint)!bVar281 * auVar581._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar656._20_4_ = (uint)bVar281 * auVar582._20_4_ | (uint)!bVar281 * auVar581._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar656._24_4_ = (uint)bVar281 * auVar582._24_4_ | (uint)!bVar281 * auVar581._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar656._28_4_ = (uint)bVar281 * auVar582._28_4_ | (uint)!bVar281 * auVar581._28_4_;
        bVar281 = (bool)(bVar11 & 1);
        auVar656._32_4_ = (uint)bVar281 * auVar582._32_4_ | (uint)!bVar281 * auVar581._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar656._36_4_ = (uint)bVar281 * auVar582._36_4_ | (uint)!bVar281 * auVar581._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar656._40_4_ = (uint)bVar281 * auVar582._40_4_ | (uint)!bVar281 * auVar581._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar656._44_4_ = (uint)bVar281 * auVar582._44_4_ | (uint)!bVar281 * auVar581._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar656._48_4_ = (uint)bVar281 * auVar582._48_4_ | (uint)!bVar281 * auVar581._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar656._52_4_ = (uint)bVar281 * auVar582._52_4_ | (uint)!bVar281 * auVar581._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar656._56_4_ = (uint)bVar281 * auVar582._56_4_ | (uint)!bVar281 * auVar581._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar656._60_4_ = (uint)bVar281 * auVar582._60_4_ | (uint)!bVar281 * auVar581._60_4_;
        auVar580 = vfmadd231ps_avx512f(auVar580,auVar656,auVar573);
        auVar579 = vfmadd231ps_avx512f(auVar580,auVar574,auVar579);
        auVar579 = vfmadd231ps_avx512f(auVar579,auVar575,auVar656);
        bVar281 = (bool)((byte)uVar279 & 1);
        auVar657._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar579._0_4_;
        bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
        auVar657._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar579._4_4_;
        bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
        auVar657._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar579._8_4_;
        bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
        auVar657._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar579._12_4_;
        bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
        auVar657._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar579._16_4_;
        bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
        auVar657._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar579._20_4_;
        bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
        auVar657._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar579._24_4_;
        bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
        auVar657._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar579._28_4_;
        bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
        auVar657._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar579._32_4_;
        bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
        auVar657._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar579._36_4_;
        bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
        auVar657._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar579._40_4_;
        bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
        auVar657._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar579._44_4_;
        bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
        auVar657._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar579._48_4_;
        bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
        auVar657._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar579._52_4_;
        bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
        auVar657._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar579._56_4_;
        bVar281 = SUB81(uVar279 >> 0xf,0);
        auVar657._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar579._60_4_;
        auVar579 = vmulps_avx512f(auVar657,*(undefined1 (*) [64])(ptr1 + uVar282));
        auVar579 = vminps_avx512f(auVar579,(undefined1  [64])afVar255);
        auVar579 = vmaxps_avx512f(auVar579,(undefined1  [64])afVar256);
        auVar580 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar579,auVar1595);
        auVar582 = vrndscaleps_avx512f(auVar580,1);
        uVar284 = vcmpps_avx512f(auVar580,auVar582,1);
        auVar580 = vsubps_avx512f(auVar582,(undefined1  [64])afVar254);
        bVar281 = (bool)((byte)uVar284 & 1);
        auVar658._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar582._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar658._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar582._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar658._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar582._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar658._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar582._12_4_;
        bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
        auVar658._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar582._16_4_;
        bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
        auVar658._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar582._20_4_;
        bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
        auVar658._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar582._24_4_;
        bVar281 = (bool)((byte)(uVar284 >> 7) & 1);
        auVar658._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar582._28_4_;
        bVar281 = (bool)((byte)(uVar284 >> 8) & 1);
        auVar658._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar582._32_4_;
        bVar281 = (bool)((byte)(uVar284 >> 9) & 1);
        auVar658._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar582._36_4_;
        bVar281 = (bool)((byte)(uVar284 >> 10) & 1);
        auVar658._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar582._40_4_;
        bVar281 = (bool)((byte)(uVar284 >> 0xb) & 1);
        auVar658._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar582._44_4_;
        bVar281 = (bool)((byte)(uVar284 >> 0xc) & 1);
        auVar658._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar582._48_4_;
        bVar281 = (bool)((byte)(uVar284 >> 0xd) & 1);
        auVar658._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar582._52_4_;
        bVar281 = (bool)((byte)(uVar284 >> 0xe) & 1);
        auVar658._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar582._56_4_;
        bVar281 = SUB81(uVar284 >> 0xf,0);
        auVar658._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar582._60_4_;
        auVar579 = vfmadd231ps_avx512f(auVar579,auVar658,auVar576);
        auVar579 = vfmadd231ps_avx512f(auVar579,auVar658,auVar650);
        auVar580 = vmulps_avx512f(auVar579,auVar579);
        auVar582 = vfmadd213ps_avx512f(auVar579,(undefined1  [64])afVar258,
                                       (undefined1  [64])afVar259);
        auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar260);
        auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar261);
        auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar262);
        auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,auVar1595);
        auVar579 = vfmadd213ps_avx512f(auVar582,auVar580,auVar579);
        auVar579 = vaddps_avx512f(auVar579,(undefined1  [64])afVar254);
        auVar580 = vcvttps2dq_avx512f(auVar658);
        auVar580 = vpaddd_avx512f(auVar580,auVar632);
        auVar580 = vpslld_avx512f(auVar580,0x17);
        auVar579 = vmulps_avx512f(auVar579,auVar580);
        *(undefined1 (*) [64])(outptr + uVar282) = auVar579;
      }
      auVar287 = ZEXT816(0) << 0x40;
      auVar1073._8_4_ = 0xffffff82;
      auVar1073._0_8_ = 0xffffff82ffffff82;
      auVar1073._12_4_ = 0xffffff82;
      auVar1073._16_4_ = 0xffffff82;
      auVar1073._20_4_ = 0xffffff82;
      auVar1073._24_4_ = 0xffffff82;
      auVar1073._28_4_ = 0xffffff82;
      auVar1126._8_4_ = 0x3f3504f3;
      auVar1126._0_8_ = 0x3f3504f33f3504f3;
      auVar1126._12_4_ = 0x3f3504f3;
      auVar1126._16_4_ = 0x3f3504f3;
      auVar1126._20_4_ = 0x3f3504f3;
      auVar1126._24_4_ = 0x3f3504f3;
      auVar1126._28_4_ = 0x3f3504f3;
      auVar1173._8_4_ = 0xbf800000;
      auVar1173._0_8_ = 0xbf800000bf800000;
      auVar1173._12_4_ = 0xbf800000;
      auVar1173._16_4_ = 0xbf800000;
      auVar1173._20_4_ = 0xbf800000;
      auVar1173._24_4_ = 0xbf800000;
      auVar1173._28_4_ = 0xbf800000;
      auVar1223._8_4_ = 0x3f800000;
      auVar1223._0_8_ = 0x3f8000003f800000;
      auVar1223._12_4_ = 0x3f800000;
      auVar1223._16_4_ = 0x3f800000;
      auVar1223._20_4_ = 0x3f800000;
      auVar1223._24_4_ = 0x3f800000;
      auVar1223._28_4_ = 0x3f800000;
      auVar957._8_4_ = 0x3d9021bb;
      auVar957._0_8_ = 0x3d9021bb3d9021bb;
      auVar957._12_4_ = 0x3d9021bb;
      auVar957._16_4_ = 0x3d9021bb;
      auVar957._20_4_ = 0x3d9021bb;
      auVar957._24_4_ = 0x3d9021bb;
      auVar957._28_4_ = 0x3d9021bb;
      auVar1325._8_4_ = 0xbdebd1b8;
      auVar1325._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1325._12_4_ = 0xbdebd1b8;
      auVar1325._16_4_ = 0xbdebd1b8;
      auVar1325._20_4_ = 0xbdebd1b8;
      auVar1325._24_4_ = 0xbdebd1b8;
      auVar1325._28_4_ = 0xbdebd1b8;
      auVar1379._8_4_ = 0x3def251a;
      auVar1379._0_8_ = 0x3def251a3def251a;
      auVar1379._12_4_ = 0x3def251a;
      auVar1379._16_4_ = 0x3def251a;
      auVar1379._20_4_ = 0x3def251a;
      auVar1379._24_4_ = 0x3def251a;
      auVar1379._28_4_ = 0x3def251a;
      auVar1433._8_4_ = 0xbdfe5d4f;
      auVar1433._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1433._12_4_ = 0xbdfe5d4f;
      auVar1433._16_4_ = 0xbdfe5d4f;
      auVar1433._20_4_ = 0xbdfe5d4f;
      auVar1433._24_4_ = 0xbdfe5d4f;
      auVar1433._28_4_ = 0xbdfe5d4f;
      auVar1487._8_4_ = 0x3e11e9bf;
      auVar1487._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1487._12_4_ = 0x3e11e9bf;
      auVar1487._16_4_ = 0x3e11e9bf;
      auVar1487._20_4_ = 0x3e11e9bf;
      auVar1487._24_4_ = 0x3e11e9bf;
      auVar1487._28_4_ = 0x3e11e9bf;
      auVar1540._8_4_ = 0xbe2aae50;
      auVar1540._0_8_ = 0xbe2aae50be2aae50;
      auVar1540._12_4_ = 0xbe2aae50;
      auVar1540._16_4_ = 0xbe2aae50;
      auVar1540._20_4_ = 0xbe2aae50;
      auVar1540._24_4_ = 0xbe2aae50;
      auVar1540._28_4_ = 0xbe2aae50;
      auVar1592._8_4_ = 0x3e4cceac;
      auVar1592._0_8_ = 0x3e4cceac3e4cceac;
      auVar1592._12_4_ = 0x3e4cceac;
      auVar1592._16_4_ = 0x3e4cceac;
      auVar1592._20_4_ = 0x3e4cceac;
      auVar1592._24_4_ = 0x3e4cceac;
      auVar1592._28_4_ = 0x3e4cceac;
      auVar495 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar558 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar719._8_4_ = 0x3f318000;
      auVar719._0_8_ = 0x3f3180003f318000;
      auVar719._12_4_ = 0x3f318000;
      auVar719._16_4_ = 0x3f318000;
      auVar719._20_4_ = 0x3f318000;
      auVar719._24_4_ = 0x3f318000;
      auVar719._28_4_ = 0x3f318000;
      uVar279 = vcmpps_avx512vl(auVar811,ZEXT1632(auVar287),2);
      auVar411 = vpcmpeqd_avx2(ZEXT1632(auVar287),ZEXT1632(auVar287));
      auVar499 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar502 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar503 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar504 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar424 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (; (int)uVar282 + 7 < iVar277; uVar282 = uVar282 + 8) {
        auVar153._8_4_ = 0x800000;
        auVar153._0_8_ = 0x80000000800000;
        auVar153._12_4_ = 0x800000;
        auVar153._16_4_ = 0x800000;
        auVar153._20_4_ = 0x800000;
        auVar153._24_4_ = 0x800000;
        auVar153._28_4_ = 0x800000;
        auVar425 = vmaxps_avx512vl(auVar811,auVar153);
        auVar418 = vpsrld_avx512vl(auVar425,0x17);
        auVar1018._8_4_ = 0x807fffff;
        auVar1018._0_8_ = 0x807fffff807fffff;
        auVar1018._12_4_ = 0x807fffff;
        auVar1018._16_4_ = 0x807fffff;
        auVar1018._20_4_ = 0x807fffff;
        auVar1018._24_4_ = 0x807fffff;
        auVar1018._28_4_ = 0x807fffff;
        auVar154._8_4_ = 0x3f000000;
        auVar154._0_8_ = 0x3f0000003f000000;
        auVar154._12_4_ = 0x3f000000;
        auVar154._16_4_ = 0x3f000000;
        auVar154._20_4_ = 0x3f000000;
        auVar154._24_4_ = 0x3f000000;
        auVar154._28_4_ = 0x3f000000;
        auVar425 = vpternlogd_avx512vl(auVar425,auVar1018,auVar154,0xea);
        uVar283 = vcmpps_avx512vl(auVar425,auVar1126,1);
        auVar427 = vaddps_avx512vl(auVar425,auVar1173);
        auVar425 = vaddps_avx512vl(auVar427,auVar425);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar565._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar427._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar565._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar427._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar565._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar427._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar565._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar427._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar565._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar427._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar565._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar427._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar565._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar427._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar565._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar427._28_4_;
        auVar427 = vmulps_avx512vl(auVar565,auVar565);
        auVar425 = vfmadd213ps_avx512vl(auVar957,auVar565,auVar1325);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar565,auVar1379);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar565,auVar1433);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar565,auVar1487);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar565,auVar1540);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar565,auVar1592);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar565,auVar495);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar565,auVar444);
        auVar412 = vmulps_avx512vl(auVar427,auVar565);
        auVar228._4_4_ = auVar425._4_4_ * auVar412._4_4_;
        auVar228._0_4_ = auVar425._0_4_ * auVar412._0_4_;
        auVar228._8_4_ = auVar425._8_4_ * auVar412._8_4_;
        auVar228._12_4_ = auVar425._12_4_ * auVar412._12_4_;
        auVar228._16_4_ = auVar425._16_4_ * auVar412._16_4_;
        auVar228._20_4_ = auVar425._20_4_ * auVar412._20_4_;
        auVar228._24_4_ = auVar425._24_4_ * auVar412._24_4_;
        auVar228._28_4_ = auVar412._28_4_;
        auVar425 = vpaddd_avx512vl(auVar418,auVar1073);
        auVar425 = vcvtdq2ps_avx(auVar425);
        auVar418 = vsubps_avx512vl(auVar425,auVar1223);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar566._0_4_ = (uint)bVar281 * auVar418._0_4_ | (uint)!bVar281 * auVar425._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar566._4_4_ = (uint)bVar281 * auVar418._4_4_ | (uint)!bVar281 * auVar425._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar566._8_4_ = (uint)bVar281 * auVar418._8_4_ | (uint)!bVar281 * auVar425._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar566._12_4_ = (uint)bVar281 * auVar418._12_4_ | (uint)!bVar281 * auVar425._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar566._16_4_ = (uint)bVar281 * auVar418._16_4_ | (uint)!bVar281 * auVar425._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar566._20_4_ = (uint)bVar281 * auVar418._20_4_ | (uint)!bVar281 * auVar425._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar566._24_4_ = (uint)bVar281 * auVar418._24_4_ | (uint)!bVar281 * auVar425._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar566._28_4_ = (uint)bVar281 * auVar418._28_4_ | (uint)!bVar281 * auVar425._28_4_;
        auVar425 = vfmadd231ps_avx512vl(auVar228,auVar566,auVar558);
        auVar425 = vfmsub231ps_avx512vl(auVar425,auVar498,auVar427);
        auVar425 = vsubps_avx512vl(auVar425,auVar565);
        auVar287 = vfmsub231ps_fma(auVar425,auVar719,auVar566);
        bVar281 = (bool)((byte)uVar279 & 1);
        bVar12 = (bool)((byte)(uVar279 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar279 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar279 >> 3) & 1);
        pfVar1599 = ptr1 + uVar282;
        auVar229._4_4_ =
             (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar287._4_4_) * pfVar1599[1];
        auVar229._0_4_ =
             (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar287._0_4_) * *pfVar1599;
        auVar229._8_4_ =
             (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar287._8_4_) * pfVar1599[2];
        auVar229._12_4_ =
             (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar287._12_4_) *
             pfVar1599[3];
        auVar229._16_4_ = (float)((uint)((byte)(uVar279 >> 4) & 1) * auVar411._16_4_) * pfVar1599[4]
        ;
        auVar229._20_4_ = (float)((uint)((byte)(uVar279 >> 5) & 1) * auVar411._20_4_) * pfVar1599[5]
        ;
        auVar229._24_4_ = (float)((uint)((byte)(uVar279 >> 6) & 1) * auVar411._24_4_) * pfVar1599[6]
        ;
        auVar229._28_4_ = (uint)(byte)(uVar279 >> 7) * auVar411._28_4_;
        auVar425 = vminps_avx512vl(auVar229,auVar499);
        auVar425 = vmaxps_avx512vl(auVar425,auVar502);
        auVar418 = vfmadd231ps_avx512vl(auVar498,auVar425,auVar503);
        auVar427 = vrndscaleps_avx512vl(auVar418,1);
        uVar283 = vcmpps_avx512vl(auVar418,auVar427,1);
        auVar412 = vsubps_avx512vl(auVar427,auVar1223);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar567._0_4_ = (uint)bVar281 * auVar412._0_4_ | (uint)!bVar281 * auVar427._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar567._4_4_ = (uint)bVar281 * auVar412._4_4_ | (uint)!bVar281 * auVar427._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar567._8_4_ = (uint)bVar281 * auVar412._8_4_ | (uint)!bVar281 * auVar427._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar567._12_4_ = (uint)bVar281 * auVar412._12_4_ | (uint)!bVar281 * auVar427._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar567._16_4_ = (uint)bVar281 * auVar412._16_4_ | (uint)!bVar281 * auVar427._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar567._20_4_ = (uint)bVar281 * auVar412._20_4_ | (uint)!bVar281 * auVar427._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar567._24_4_ = (uint)bVar281 * auVar412._24_4_ | (uint)!bVar281 * auVar427._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar567._28_4_ = (uint)bVar281 * auVar412._28_4_ | (uint)!bVar281 * auVar427._28_4_;
        auVar425 = vfmsub231ps_avx512vl(auVar425,auVar567,auVar719);
        auVar425 = vfnmsub231ps_avx512vl(auVar425,auVar567,auVar558);
        auVar230._4_4_ = auVar425._4_4_ * auVar425._4_4_;
        auVar230._0_4_ = auVar425._0_4_ * auVar425._0_4_;
        auVar230._8_4_ = auVar425._8_4_ * auVar425._8_4_;
        auVar230._12_4_ = auVar425._12_4_ * auVar425._12_4_;
        auVar230._16_4_ = auVar425._16_4_ * auVar425._16_4_;
        auVar230._20_4_ = auVar425._20_4_ * auVar425._20_4_;
        auVar230._24_4_ = auVar425._24_4_ * auVar425._24_4_;
        auVar230._28_4_ = auVar418._28_4_;
        auVar418 = vfmadd213ps_avx512vl(auVar504,auVar425,auVar420);
        auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar421);
        auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar422);
        auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar423);
        auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar498);
        auVar425 = vfmadd213ps_avx512vl(auVar418,auVar230,auVar425);
        auVar418 = vcvttps2dq_avx512vl(auVar567);
        auVar418 = vpslld_avx2(auVar418,0x17);
        auVar418 = vpaddd_avx512vl(auVar418,auVar424);
        auVar425 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar418);
        *(undefined1 (*) [32])(outptr + uVar282) = auVar425;
      }
      auVar287 = ZEXT816(0) << 0x20;
      auVar929._8_4_ = 0x807fffff;
      auVar929._0_8_ = 0x807fffff807fffff;
      auVar929._12_4_ = 0x807fffff;
      auVar987._8_4_ = 0xffffff82;
      auVar987._0_8_ = 0xffffff82ffffff82;
      auVar987._12_4_ = 0xffffff82;
      auVar1041._8_4_ = 0x3f3504f3;
      auVar1041._0_8_ = 0x3f3504f33f3504f3;
      auVar1041._12_4_ = 0x3f3504f3;
      auVar1096._8_4_ = 0xbf800000;
      auVar1096._0_8_ = 0xbf800000bf800000;
      auVar1096._12_4_ = 0xbf800000;
      auVar1149._8_4_ = 0x3f800000;
      auVar1149._0_8_ = 0x3f8000003f800000;
      auVar1149._12_4_ = 0x3f800000;
      auVar771._8_4_ = 0x3d9021bb;
      auVar771._0_8_ = 0x3d9021bb3d9021bb;
      auVar771._12_4_ = 0x3d9021bb;
      auVar1246._8_4_ = 0xbdebd1b8;
      auVar1246._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1246._12_4_ = 0xbdebd1b8;
      auVar1294._8_4_ = 0x3def251a;
      auVar1294._0_8_ = 0x3def251a3def251a;
      auVar1294._12_4_ = 0x3def251a;
      auVar1348._8_4_ = 0xbdfe5d4f;
      auVar1348._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1348._12_4_ = 0xbdfe5d4f;
      auVar1402._8_4_ = 0x3e11e9bf;
      auVar1402._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1402._12_4_ = 0x3e11e9bf;
      auVar1456._8_4_ = 0xbe2aae50;
      auVar1456._0_8_ = 0xbe2aae50be2aae50;
      auVar1456._12_4_ = 0xbe2aae50;
      auVar1509._8_4_ = 0x3e4cceac;
      auVar1509._0_8_ = 0x3e4cceac3e4cceac;
      auVar1509._12_4_ = 0x3e4cceac;
      auVar1562._8_4_ = 0xbe7ffffc;
      auVar1562._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1562._12_4_ = 0xbe7ffffc;
      auVar350 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar351 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar355 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      uVar279 = vcmpps_avx512vl(auVar287,_local_f8,0xd);
      auVar287 = vpcmpeqd_avx(auVar287,auVar287);
      auVar356 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar359 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar395 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar396 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar296 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar299 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (; (int)uVar282 + 3 < iVar277; uVar282 = uVar282 + 4) {
        auVar842._8_4_ = 0x800000;
        auVar842._0_8_ = 0x80000000800000;
        auVar842._12_4_ = 0x800000;
        auVar300 = vmaxps_avx512vl(auVar842,_local_f8);
        auVar301 = vpsrld_avx512vl(auVar300,0x17);
        auVar77._8_4_ = 0x3f000000;
        auVar77._0_8_ = 0x3f0000003f000000;
        auVar77._12_4_ = 0x3f000000;
        auVar300 = vpternlogd_avx512vl(auVar300,auVar929,auVar77,0xea);
        uVar283 = vcmpps_avx512vl(auVar300,auVar1041,1);
        auVar294 = vaddps_avx512vl(auVar300,auVar1096);
        auVar300 = vaddps_avx512vl(auVar294,auVar300);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar403._0_4_ = (uint)bVar281 * auVar300._0_4_ | (uint)!bVar281 * auVar294._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar403._4_4_ = (uint)bVar281 * auVar300._4_4_ | (uint)!bVar281 * auVar294._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar403._8_4_ = (uint)bVar281 * auVar300._8_4_ | (uint)!bVar281 * auVar294._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar403._12_4_ = (uint)bVar281 * auVar300._12_4_ | (uint)!bVar281 * auVar294._12_4_;
        auVar294 = vmulps_avx512vl(auVar403,auVar403);
        auVar300 = vfmadd213ps_avx512vl(auVar771,auVar403,auVar1246);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar403,auVar1294);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar403,auVar1348);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar403,auVar1402);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar403,auVar1456);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar403,auVar1509);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar403,auVar1562);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar403,auVar350);
        auVar303 = vmulps_avx512vl(auVar294,auVar403);
        auVar843._0_4_ = auVar300._0_4_ * auVar303._0_4_;
        auVar843._4_4_ = auVar300._4_4_ * auVar303._4_4_;
        auVar843._8_4_ = auVar300._8_4_ * auVar303._8_4_;
        auVar843._12_4_ = auVar300._12_4_ * auVar303._12_4_;
        auVar300 = vpaddd_avx512vl(auVar301,auVar987);
        auVar300 = vcvtdq2ps_avx(auVar300);
        auVar301 = vsubps_avx512vl(auVar300,auVar1149);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar404._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar300._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar404._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar300._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar404._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar300._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar404._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar300._12_4_;
        auVar300 = vfmadd231ps_avx512vl(auVar843,auVar404,auVar351);
        auVar300 = vfmsub231ps_avx512vl(auVar300,auVar354,auVar294);
        auVar300 = vsubps_avx512vl(auVar300,auVar403);
        auVar300 = vfmsub231ps_avx512vl(auVar300,auVar355,auVar404);
        bVar281 = (bool)((byte)uVar279 & 1);
        bVar12 = (bool)((byte)(uVar279 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar279 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar279 >> 3) & 1);
        pfVar1599 = ptr1 + uVar282;
        auVar844._0_4_ =
             (float)((uint)bVar281 * auVar287._0_4_ | (uint)!bVar281 * auVar300._0_4_) * *pfVar1599;
        auVar844._4_4_ =
             (float)((uint)bVar12 * auVar287._4_4_ | (uint)!bVar12 * auVar300._4_4_) * pfVar1599[1];
        auVar844._8_4_ =
             (float)((uint)bVar13 * auVar287._8_4_ | (uint)!bVar13 * auVar300._8_4_) * pfVar1599[2];
        auVar844._12_4_ =
             (float)((uint)bVar14 * auVar287._12_4_ | (uint)!bVar14 * auVar300._12_4_) *
             pfVar1599[3];
        auVar300 = vminps_avx512vl(auVar844,auVar356);
        auVar300 = vmaxps_avx512vl(auVar300,auVar359);
        auVar301 = vfmadd231ps_avx512vl(auVar354,auVar300,auVar360);
        auVar294 = vcvttps2dq_avx512vl(auVar301);
        auVar294 = vcvtdq2ps_avx512vl(auVar294);
        uVar283 = vcmpps_avx512vl(auVar301,auVar294,1);
        auVar301 = vsubps_avx512vl(auVar294,auVar1149);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar405._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar294._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar405._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar294._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar405._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar294._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar405._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar294._12_4_;
        auVar300 = vfmsub231ps_avx512vl(auVar300,auVar405,auVar355);
        auVar300 = vfnmsub231ps_avx512vl(auVar300,auVar405,auVar351);
        auVar1196._0_4_ = auVar300._0_4_ * auVar300._0_4_;
        auVar1196._4_4_ = auVar300._4_4_ * auVar300._4_4_;
        auVar1196._8_4_ = auVar300._8_4_ * auVar300._8_4_;
        auVar1196._12_4_ = auVar300._12_4_ * auVar300._12_4_;
        auVar301 = vfmadd213ps_avx512vl(auVar395,auVar300,auVar396);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar296);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar297);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar298);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar354);
        auVar300 = vfmadd213ps_avx512vl(auVar301,auVar1196,auVar300);
        auVar301 = vcvttps2dq_avx512vl(auVar405);
        auVar301 = vpslld_avx(auVar301,0x17);
        auVar301 = vpaddd_avx512vl(auVar301,auVar299);
        auVar300 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar301);
        *(undefined1 (*) [16])(outptr + uVar282) = auVar300;
      }
      lVar280 = 0;
      for (uVar279 = uVar282 & 0xffffffff; (int)uVar279 < iVar277;
          uVar279 = (ulong)((int)uVar279 + 1)) {
        pfVar1599 = outptr;
        fVar667 = powf(fVar666,*(float *)((long)ptr1 + uVar282 * 4 + lVar280));
        *(float *)((long)outptr + uVar282 * 4 + lVar280) = fVar667;
        lVar280 = lVar280 + 4;
        outptr = pfVar1599;
      }
      return;
    }
    fVar666 = *ptr1;
    if (iVar276 == 4) {
      _local_f8 = *(undefined1 (*) [16])ptr1;
      auVar1594 = ZEXT3264(CONCAT1616(_local_f8,_local_f8));
    }
    else {
      local_f8._4_4_ = fVar666;
      local_f8._0_4_ = fVar666;
      fStack_f0 = fVar666;
      fStack_ec = fVar666;
      if (iVar276 == 8) {
        auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar1594 = ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,CONCAT416(fVar666
                                                  ,CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))))))));
        if (iVar276 == 0x10) {
          auVar1594 = vmovdqu64_avx512f(auVar1594);
          _local_b8 = auVar1594._0_28_;
          auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_00387bbd;
        }
      }
    }
    auVar1595 = vmovdqu64_avx512f(auVar1594);
    _local_b8 = auVar1595._0_28_;
    auVar1594 = vinserti64x4_avx512f(auVar1594,auVar1594._0_32_,1);
LAB_00387bbd:
    auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    auVar632 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar573 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar632);
    auVar650 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar632);
    auVar632 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar632);
    auVar574 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p2);
    uVar279 = 0;
    auVar287 = vxorps_avx512vl(auVar356,auVar356);
    auVar575 = vpternlogd_avx512f(in_ZMM26,in_ZMM26,in_ZMM26,0xff);
    for (; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar576 = vmaxps_avx512f(*(undefined1 (*) [64])(ptr + uVar279),
                                (undefined1  [64])_ps512_min_norm_pos);
      auVar577 = vpsrld_avx512f(auVar576,0x17);
      auVar576 = vpternlogd_avx512f(auVar576,(undefined1  [64])afVar263,
                                    (undefined1  [64])_ps512_inv_mant_mask,0xec);
      uVar283 = vcmpps_avx512f(auVar576,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      auVar578 = vsubps_avx512f(auVar576,(undefined1  [64])afVar254);
      auVar576 = vaddps_avx512f(auVar578,auVar576);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar637._0_4_ = (uint)bVar281 * auVar576._0_4_ | (uint)!bVar281 * auVar578._0_4_;
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar637._4_4_ = (uint)bVar281 * auVar576._4_4_ | (uint)!bVar281 * auVar578._4_4_;
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar637._8_4_ = (uint)bVar281 * auVar576._8_4_ | (uint)!bVar281 * auVar578._8_4_;
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar637._12_4_ = (uint)bVar281 * auVar576._12_4_ | (uint)!bVar281 * auVar578._12_4_;
      bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
      auVar637._16_4_ = (uint)bVar281 * auVar576._16_4_ | (uint)!bVar281 * auVar578._16_4_;
      bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
      auVar637._20_4_ = (uint)bVar281 * auVar576._20_4_ | (uint)!bVar281 * auVar578._20_4_;
      bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
      auVar637._24_4_ = (uint)bVar281 * auVar576._24_4_ | (uint)!bVar281 * auVar578._24_4_;
      bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
      auVar637._28_4_ = (uint)bVar281 * auVar576._28_4_ | (uint)!bVar281 * auVar578._28_4_;
      bVar11 = (byte)(uVar283 >> 8);
      bVar281 = (bool)(bVar11 & 1);
      auVar637._32_4_ = (uint)bVar281 * auVar576._32_4_ | (uint)!bVar281 * auVar578._32_4_;
      bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
      auVar637._36_4_ = (uint)bVar281 * auVar576._36_4_ | (uint)!bVar281 * auVar578._36_4_;
      bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
      auVar637._40_4_ = (uint)bVar281 * auVar576._40_4_ | (uint)!bVar281 * auVar578._40_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
      auVar637._44_4_ = (uint)bVar281 * auVar576._44_4_ | (uint)!bVar281 * auVar578._44_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
      auVar637._48_4_ = (uint)bVar281 * auVar576._48_4_ | (uint)!bVar281 * auVar578._48_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
      auVar637._52_4_ = (uint)bVar281 * auVar576._52_4_ | (uint)!bVar281 * auVar578._52_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
      auVar637._56_4_ = (uint)bVar281 * auVar576._56_4_ | (uint)!bVar281 * auVar578._56_4_;
      bVar281 = SUB81(uVar283 >> 0xf,0);
      auVar637._60_4_ = (uint)bVar281 * auVar576._60_4_ | (uint)!bVar281 * auVar578._60_4_;
      auVar576 = vmulps_avx512f(auVar637,auVar637);
      auVar578 = vfmadd132ps_avx512f(auVar637,(undefined1  [64])_ps512_cephes_log_p1,
                                     (undefined1  [64])_ps512_cephes_log_p0);
      auVar578 = vfmadd213ps_avx512f(auVar578,auVar637,(undefined1  [64])afVar267);
      auVar578 = vfmadd213ps_avx512f(auVar578,auVar637,(undefined1  [64])afVar268);
      auVar578 = vfmadd213ps_avx512f(auVar578,auVar637,(undefined1  [64])afVar269);
      auVar578 = vfmadd213ps_avx512f(auVar578,auVar637,(undefined1  [64])afVar270);
      auVar578 = vfmadd213ps_avx512f(auVar578,auVar637,(undefined1  [64])afVar271);
      auVar578 = vfmadd213ps_avx512f(auVar578,auVar637,(undefined1  [64])afVar272);
      auVar578 = vfmadd213ps_avx512f(auVar578,auVar637,(undefined1  [64])afVar273);
      auVar579 = vmulps_avx512f(auVar576,auVar637);
      auVar578 = vfmadd213ps_avx512f(auVar579,auVar578,auVar637);
      uVar282 = vcmpps_avx512f(*(undefined1 (*) [64])(ptr + uVar279),ZEXT1664(auVar287),2);
      auVar577 = vpsubd_avx512f(auVar577,auVar1595);
      auVar577 = vcvtdq2ps_avx512f(auVar577);
      auVar579 = vaddps_avx512f(auVar577,(undefined1  [64])afVar254);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar638._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar579._0_4_;
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar638._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar579._4_4_;
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar638._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar579._8_4_;
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar638._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar579._12_4_;
      bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
      auVar638._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar579._16_4_;
      bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
      auVar638._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar579._20_4_;
      bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
      auVar638._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar579._24_4_;
      bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
      auVar638._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar579._28_4_;
      bVar281 = (bool)(bVar11 & 1);
      auVar638._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar579._32_4_;
      bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
      auVar638._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar579._36_4_;
      bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
      auVar638._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar579._40_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
      auVar638._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar579._44_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
      auVar638._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar579._48_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
      auVar638._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar579._52_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
      auVar638._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar579._56_4_;
      bVar281 = SUB81(uVar283 >> 0xf,0);
      auVar638._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar579._60_4_;
      auVar577 = vfmadd231ps_avx512f(auVar578,auVar638,(undefined1  [64])afVar274);
      auVar576 = vfmadd231ps_avx512f(auVar577,auVar573,auVar576);
      auVar576 = vfmadd231ps_avx512f(auVar576,(undefined1  [64])afVar275,auVar638);
      bVar281 = (bool)((byte)uVar282 & 1);
      auVar639._0_4_ = (uint)bVar281 * auVar575._0_4_ | (uint)!bVar281 * auVar576._0_4_;
      bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
      auVar639._4_4_ = (uint)bVar281 * auVar575._4_4_ | (uint)!bVar281 * auVar576._4_4_;
      bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
      auVar639._8_4_ = (uint)bVar281 * auVar575._8_4_ | (uint)!bVar281 * auVar576._8_4_;
      bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
      auVar639._12_4_ = (uint)bVar281 * auVar575._12_4_ | (uint)!bVar281 * auVar576._12_4_;
      bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
      auVar639._16_4_ = (uint)bVar281 * auVar575._16_4_ | (uint)!bVar281 * auVar576._16_4_;
      bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
      auVar639._20_4_ = (uint)bVar281 * auVar575._20_4_ | (uint)!bVar281 * auVar576._20_4_;
      bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
      auVar639._24_4_ = (uint)bVar281 * auVar575._24_4_ | (uint)!bVar281 * auVar576._24_4_;
      bVar281 = (bool)((byte)(uVar282 >> 7) & 1);
      auVar639._28_4_ = (uint)bVar281 * auVar575._28_4_ | (uint)!bVar281 * auVar576._28_4_;
      bVar281 = (bool)((byte)(uVar282 >> 8) & 1);
      auVar639._32_4_ = (uint)bVar281 * auVar575._32_4_ | (uint)!bVar281 * auVar576._32_4_;
      bVar281 = (bool)((byte)(uVar282 >> 9) & 1);
      auVar639._36_4_ = (uint)bVar281 * auVar575._36_4_ | (uint)!bVar281 * auVar576._36_4_;
      bVar281 = (bool)((byte)(uVar282 >> 10) & 1);
      auVar639._40_4_ = (uint)bVar281 * auVar575._40_4_ | (uint)!bVar281 * auVar576._40_4_;
      bVar281 = (bool)((byte)(uVar282 >> 0xb) & 1);
      auVar639._44_4_ = (uint)bVar281 * auVar575._44_4_ | (uint)!bVar281 * auVar576._44_4_;
      bVar281 = (bool)((byte)(uVar282 >> 0xc) & 1);
      auVar639._48_4_ = (uint)bVar281 * auVar575._48_4_ | (uint)!bVar281 * auVar576._48_4_;
      bVar281 = (bool)((byte)(uVar282 >> 0xd) & 1);
      auVar639._52_4_ = (uint)bVar281 * auVar575._52_4_ | (uint)!bVar281 * auVar576._52_4_;
      bVar281 = (bool)((byte)(uVar282 >> 0xe) & 1);
      auVar639._56_4_ = (uint)bVar281 * auVar575._56_4_ | (uint)!bVar281 * auVar576._56_4_;
      bVar281 = SUB81(uVar282 >> 0xf,0);
      auVar639._60_4_ = (uint)bVar281 * auVar575._60_4_ | (uint)!bVar281 * auVar576._60_4_;
      auVar576 = vmulps_avx512f(auVar639,auVar1594);
      auVar576 = vminps_avx512f(auVar576,(undefined1  [64])afVar255);
      auVar576 = vmaxps_avx512f(auVar576,(undefined1  [64])afVar256);
      auVar577 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar576,(undefined1  [64])afVar263)
      ;
      auVar578 = vrndscaleps_avx512f(auVar577,1);
      uVar283 = vcmpps_avx512f(auVar577,auVar578,1);
      auVar577 = vsubps_avx512f(auVar578,(undefined1  [64])afVar254);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar640._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar578._0_4_;
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar640._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar578._4_4_;
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar640._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar578._8_4_;
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar640._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar578._12_4_;
      bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
      auVar640._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar578._16_4_;
      bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
      auVar640._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar578._20_4_;
      bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
      auVar640._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar578._24_4_;
      bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
      auVar640._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar578._28_4_;
      bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
      auVar640._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar578._32_4_;
      bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
      auVar640._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar578._36_4_;
      bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
      auVar640._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar578._40_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
      auVar640._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar578._44_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
      auVar640._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar578._48_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
      auVar640._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar578._52_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
      auVar640._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar578._56_4_;
      bVar281 = SUB81(uVar283 >> 0xf,0);
      auVar640._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar578._60_4_;
      auVar576 = vfmadd231ps_avx512f(auVar576,auVar640,auVar650);
      auVar576 = vfmadd231ps_avx512f(auVar576,auVar640,auVar632);
      auVar577 = vmulps_avx512f(auVar576,auVar576);
      auVar578 = vfmadd213ps_avx512f(auVar576,(undefined1  [64])afVar258,(undefined1  [64])afVar259)
      ;
      auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,auVar574);
      auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar261);
      auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar262);
      auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar263);
      auVar576 = vfmadd213ps_avx512f(auVar578,auVar577,auVar576);
      auVar576 = vaddps_avx512f(auVar576,(undefined1  [64])afVar254);
      auVar577 = vcvttps2dq_avx512f(auVar640);
      auVar577 = vpaddd_avx512f(auVar577,auVar1595);
      auVar577 = vpslld_avx512f(auVar577,0x17);
      auVar576 = vmulps_avx512f(auVar576,auVar577);
      *(undefined1 (*) [64])(outptr + uVar279) = auVar576;
    }
    auVar1062._8_4_ = 0xffffff82;
    auVar1062._0_8_ = 0xffffff82ffffff82;
    auVar1062._12_4_ = 0xffffff82;
    auVar1062._16_4_ = 0xffffff82;
    auVar1062._20_4_ = 0xffffff82;
    auVar1062._24_4_ = 0xffffff82;
    auVar1062._28_4_ = 0xffffff82;
    auVar1115._8_4_ = 0x3f3504f3;
    auVar1115._0_8_ = 0x3f3504f33f3504f3;
    auVar1115._12_4_ = 0x3f3504f3;
    auVar1115._16_4_ = 0x3f3504f3;
    auVar1115._20_4_ = 0x3f3504f3;
    auVar1115._24_4_ = 0x3f3504f3;
    auVar1115._28_4_ = 0x3f3504f3;
    auVar1162._8_4_ = 0xbf800000;
    auVar1162._0_8_ = 0xbf800000bf800000;
    auVar1162._12_4_ = 0xbf800000;
    auVar1162._16_4_ = 0xbf800000;
    auVar1162._20_4_ = 0xbf800000;
    auVar1162._24_4_ = 0xbf800000;
    auVar1162._28_4_ = 0xbf800000;
    auVar1213._8_4_ = 0x3f800000;
    auVar1213._0_8_ = 0x3f8000003f800000;
    auVar1213._12_4_ = 0x3f800000;
    auVar1213._16_4_ = 0x3f800000;
    auVar1213._20_4_ = 0x3f800000;
    auVar1213._24_4_ = 0x3f800000;
    auVar1213._28_4_ = 0x3f800000;
    auVar947._8_4_ = 0x3d9021bb;
    auVar947._0_8_ = 0x3d9021bb3d9021bb;
    auVar947._12_4_ = 0x3d9021bb;
    auVar947._16_4_ = 0x3d9021bb;
    auVar947._20_4_ = 0x3d9021bb;
    auVar947._24_4_ = 0x3d9021bb;
    auVar947._28_4_ = 0x3d9021bb;
    auVar1313._8_4_ = 0xbdebd1b8;
    auVar1313._0_8_ = 0xbdebd1b8bdebd1b8;
    auVar1313._12_4_ = 0xbdebd1b8;
    auVar1313._16_4_ = 0xbdebd1b8;
    auVar1313._20_4_ = 0xbdebd1b8;
    auVar1313._24_4_ = 0xbdebd1b8;
    auVar1313._28_4_ = 0xbdebd1b8;
    auVar1367._8_4_ = 0x3def251a;
    auVar1367._0_8_ = 0x3def251a3def251a;
    auVar1367._12_4_ = 0x3def251a;
    auVar1367._16_4_ = 0x3def251a;
    auVar1367._20_4_ = 0x3def251a;
    auVar1367._24_4_ = 0x3def251a;
    auVar1367._28_4_ = 0x3def251a;
    auVar1421._8_4_ = 0xbdfe5d4f;
    auVar1421._0_8_ = 0xbdfe5d4fbdfe5d4f;
    auVar1421._12_4_ = 0xbdfe5d4f;
    auVar1421._16_4_ = 0xbdfe5d4f;
    auVar1421._20_4_ = 0xbdfe5d4f;
    auVar1421._24_4_ = 0xbdfe5d4f;
    auVar1421._28_4_ = 0xbdfe5d4f;
    auVar1475._8_4_ = 0x3e11e9bf;
    auVar1475._0_8_ = 0x3e11e9bf3e11e9bf;
    auVar1475._12_4_ = 0x3e11e9bf;
    auVar1475._16_4_ = 0x3e11e9bf;
    auVar1475._20_4_ = 0x3e11e9bf;
    auVar1475._24_4_ = 0x3e11e9bf;
    auVar1475._28_4_ = 0x3e11e9bf;
    auVar1528._8_4_ = 0xbe2aae50;
    auVar1528._0_8_ = 0xbe2aae50be2aae50;
    auVar1528._12_4_ = 0xbe2aae50;
    auVar1528._16_4_ = 0xbe2aae50;
    auVar1528._20_4_ = 0xbe2aae50;
    auVar1528._24_4_ = 0xbe2aae50;
    auVar1528._28_4_ = 0xbe2aae50;
    auVar1581._8_4_ = 0x3e4cceac;
    auVar1581._0_8_ = 0x3e4cceac3e4cceac;
    auVar1581._12_4_ = 0x3e4cceac;
    auVar1581._16_4_ = 0x3e4cceac;
    auVar1581._20_4_ = 0x3e4cceac;
    auVar1581._24_4_ = 0x3e4cceac;
    auVar1581._28_4_ = 0x3e4cceac;
    auVar495 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
    auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar558 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
    auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar682._8_4_ = 0x3f318000;
    auVar682._0_8_ = 0x3f3180003f318000;
    auVar682._12_4_ = 0x3f318000;
    auVar712._16_4_ = 0x3f318000;
    auVar712._0_16_ = auVar682;
    auVar712._20_4_ = 0x3f318000;
    auVar712._24_4_ = 0x3f318000;
    auVar712._28_4_ = 0x3f318000;
    auVar287 = vxorps_avx512vl(auVar355,auVar355);
    auVar411 = vpcmpeqd_avx2(auVar574._0_32_,auVar574._0_32_);
    auVar499 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar502 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar503 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar504 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
    auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
    auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
    auVar424 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      uVar283 = vcmpps_avx512vl(*(undefined1 (*) [32])(ptr + uVar279),ZEXT1632(auVar287),2);
      auVar151._8_4_ = 0x800000;
      auVar151._0_8_ = 0x80000000800000;
      auVar151._12_4_ = 0x800000;
      auVar151._16_4_ = 0x800000;
      auVar151._20_4_ = 0x800000;
      auVar151._24_4_ = 0x800000;
      auVar151._28_4_ = 0x800000;
      auVar425 = vmaxps_avx512vl(*(undefined1 (*) [32])(ptr + uVar279),auVar151);
      auVar418 = vpsrld_avx512vl(auVar425,0x17);
      auVar889._8_4_ = 0x807fffff;
      auVar889._0_8_ = 0x807fffff807fffff;
      auVar889._12_4_ = 0x807fffff;
      auVar889._16_4_ = 0x807fffff;
      auVar889._20_4_ = 0x807fffff;
      auVar889._24_4_ = 0x807fffff;
      auVar889._28_4_ = 0x807fffff;
      auVar152._8_4_ = 0x3f000000;
      auVar152._0_8_ = 0x3f0000003f000000;
      auVar152._12_4_ = 0x3f000000;
      auVar152._16_4_ = 0x3f000000;
      auVar152._20_4_ = 0x3f000000;
      auVar152._24_4_ = 0x3f000000;
      auVar152._28_4_ = 0x3f000000;
      auVar425 = vpternlogd_avx512vl(auVar425,auVar889,auVar152,0xea);
      uVar282 = vcmpps_avx512vl(auVar425,auVar1115,1);
      auVar427 = vaddps_avx512vl(auVar425,auVar1162);
      auVar425 = vaddps_avx512vl(auVar427,auVar425);
      bVar281 = (bool)((byte)uVar282 & 1);
      auVar509._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar427._0_4_;
      bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
      auVar509._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar427._4_4_;
      bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
      auVar509._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar427._8_4_;
      bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
      auVar509._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar427._12_4_;
      bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
      auVar509._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar427._16_4_;
      bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
      auVar509._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar427._20_4_;
      bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
      auVar509._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar427._24_4_;
      bVar281 = SUB81(uVar282 >> 7,0);
      auVar509._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar427._28_4_;
      auVar427 = vmulps_avx512vl(auVar509,auVar509);
      auVar350 = vfmadd213ps_fma(auVar947,auVar509,auVar1313);
      auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar509,auVar1367);
      auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar509,auVar1421);
      auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar509,auVar1475);
      auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar509,auVar1528);
      auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar509,auVar1581);
      auVar425 = vfmadd213ps_avx512vl(ZEXT1632(auVar350),auVar509,auVar495);
      auVar425 = vfmadd213ps_avx512vl(auVar425,auVar509,auVar444);
      auVar412 = vmulps_avx512vl(auVar427,auVar509);
      auVar211._4_4_ = auVar425._4_4_ * auVar412._4_4_;
      auVar211._0_4_ = auVar425._0_4_ * auVar412._0_4_;
      auVar211._8_4_ = auVar425._8_4_ * auVar412._8_4_;
      auVar211._12_4_ = auVar425._12_4_ * auVar412._12_4_;
      auVar211._16_4_ = auVar425._16_4_ * auVar412._16_4_;
      auVar211._20_4_ = auVar425._20_4_ * auVar412._20_4_;
      auVar211._24_4_ = auVar425._24_4_ * auVar412._24_4_;
      auVar211._28_4_ = auVar412._28_4_;
      auVar425 = vpaddd_avx512vl(auVar418,auVar1062);
      auVar425 = vcvtdq2ps_avx(auVar425);
      auVar418 = vsubps_avx512vl(auVar425,auVar1213);
      bVar281 = (bool)((byte)uVar282 & 1);
      auVar510._0_4_ = (uint)bVar281 * auVar418._0_4_ | (uint)!bVar281 * auVar425._0_4_;
      bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
      auVar510._4_4_ = (uint)bVar281 * auVar418._4_4_ | (uint)!bVar281 * auVar425._4_4_;
      bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
      auVar510._8_4_ = (uint)bVar281 * auVar418._8_4_ | (uint)!bVar281 * auVar425._8_4_;
      bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
      auVar510._12_4_ = (uint)bVar281 * auVar418._12_4_ | (uint)!bVar281 * auVar425._12_4_;
      bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
      auVar510._16_4_ = (uint)bVar281 * auVar418._16_4_ | (uint)!bVar281 * auVar425._16_4_;
      bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
      auVar510._20_4_ = (uint)bVar281 * auVar418._20_4_ | (uint)!bVar281 * auVar425._20_4_;
      bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
      auVar510._24_4_ = (uint)bVar281 * auVar418._24_4_ | (uint)!bVar281 * auVar425._24_4_;
      bVar281 = SUB81(uVar282 >> 7,0);
      auVar510._28_4_ = (uint)bVar281 * auVar418._28_4_ | (uint)!bVar281 * auVar425._28_4_;
      auVar425 = vfmadd231ps_avx512vl(auVar211,auVar510,auVar558);
      auVar425 = vfmsub231ps_avx512vl(auVar425,auVar498,auVar427);
      auVar425 = vsubps_avx(auVar425,auVar509);
      auVar350 = vfmsub231ps_fma(auVar425,auVar712,auVar510);
      bVar281 = (bool)((byte)uVar283 & 1);
      bVar12 = (bool)((byte)(uVar283 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar283 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar212._4_4_ =
           (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar350._4_4_) *
           (float)local_b8._4_4_;
      auVar212._0_4_ =
           (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar350._0_4_) *
           (float)local_b8._0_4_;
      auVar212._8_4_ =
           (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar350._8_4_) * fStack_b0;
      auVar212._12_4_ =
           (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar350._12_4_) * fStack_ac;
      auVar212._16_4_ = (float)((uint)((byte)(uVar283 >> 4) & 1) * auVar411._16_4_) * fStack_a8;
      auVar212._20_4_ = (float)((uint)((byte)(uVar283 >> 5) & 1) * auVar411._20_4_) * fStack_a4;
      auVar212._24_4_ = (float)((uint)((byte)(uVar283 >> 6) & 1) * auVar411._24_4_) * fStack_a0;
      auVar212._28_4_ = (uint)(byte)(uVar283 >> 7) * auVar411._28_4_;
      auVar425 = vminps_avx512vl(auVar212,auVar499);
      auVar418 = vmaxps_avx512vl(auVar425,auVar502);
      auVar427 = vfmadd231ps_avx512vl(auVar498,auVar418,auVar503);
      auVar425 = vroundps_avx(auVar427,1);
      uVar283 = vcmpps_avx512vl(auVar427,auVar425,1);
      auVar412 = vsubps_avx512vl(auVar425,auVar1213);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar511._0_4_ = (float)((uint)bVar281 * auVar412._0_4_ | (uint)!bVar281 * auVar425._0_4_);
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar511._4_4_ = (float)((uint)bVar281 * auVar412._4_4_ | (uint)!bVar281 * auVar425._4_4_);
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar511._8_4_ = (float)((uint)bVar281 * auVar412._8_4_ | (uint)!bVar281 * auVar425._8_4_);
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar511._12_4_ = (float)((uint)bVar281 * auVar412._12_4_ | (uint)!bVar281 * auVar425._12_4_);
      bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
      auVar511._16_4_ = (float)((uint)bVar281 * auVar412._16_4_ | (uint)!bVar281 * auVar425._16_4_);
      bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
      auVar511._20_4_ = (float)((uint)bVar281 * auVar412._20_4_ | (uint)!bVar281 * auVar425._20_4_);
      bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
      auVar511._24_4_ = (float)((uint)bVar281 * auVar412._24_4_ | (uint)!bVar281 * auVar425._24_4_);
      bVar281 = SUB81(uVar283 >> 7,0);
      auVar511._28_4_ = (float)((uint)bVar281 * auVar412._28_4_ | (uint)!bVar281 * auVar425._28_4_);
      auVar350 = vfmsub231ps_fma(auVar418,auVar511,auVar712);
      auVar425 = vfnmsub231ps_avx512vl(ZEXT1632(auVar350),auVar511,auVar558);
      auVar213._4_4_ = auVar425._4_4_ * auVar425._4_4_;
      auVar213._0_4_ = auVar425._0_4_ * auVar425._0_4_;
      auVar213._8_4_ = auVar425._8_4_ * auVar425._8_4_;
      auVar213._12_4_ = auVar425._12_4_ * auVar425._12_4_;
      auVar213._16_4_ = auVar425._16_4_ * auVar425._16_4_;
      auVar213._20_4_ = auVar425._20_4_ * auVar425._20_4_;
      auVar213._24_4_ = auVar425._24_4_ * auVar425._24_4_;
      auVar213._28_4_ = auVar427._28_4_;
      auVar418 = vfmadd213ps_avx512vl(auVar504,auVar425,auVar420);
      auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar421);
      auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar422);
      auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar423);
      auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar498);
      auVar425 = vfmadd213ps_avx512vl(auVar418,auVar213,auVar425);
      auVar890._0_4_ = (int)auVar511._0_4_;
      auVar890._4_4_ = (int)auVar511._4_4_;
      auVar890._8_4_ = (int)auVar511._8_4_;
      auVar890._12_4_ = (int)auVar511._12_4_;
      auVar890._16_4_ = (int)auVar511._16_4_;
      auVar890._20_4_ = (int)auVar511._20_4_;
      auVar890._24_4_ = (int)auVar511._24_4_;
      auVar890._28_4_ = (int)auVar511._28_4_;
      auVar418 = vpslld_avx2(auVar890,0x17);
      auVar418 = vpaddd_avx512vl(auVar418,auVar424);
      auVar425 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar418);
      *(undefined1 (*) [32])(outptr + uVar279) = auVar425;
    }
    auVar977._8_4_ = 0xffffff82;
    auVar977._0_8_ = 0xffffff82ffffff82;
    auVar977._12_4_ = 0xffffff82;
    auVar1033._8_4_ = 0x3f3504f3;
    auVar1033._0_8_ = 0x3f3504f33f3504f3;
    auVar1033._12_4_ = 0x3f3504f3;
    auVar1088._8_4_ = 0xbf800000;
    auVar1088._0_8_ = 0xbf800000bf800000;
    auVar1088._12_4_ = 0xbf800000;
    auVar1141._8_4_ = 0x3f800000;
    auVar1141._0_8_ = 0x3f8000003f800000;
    auVar1141._12_4_ = 0x3f800000;
    auVar834._8_4_ = 0x3d9021bb;
    auVar834._0_8_ = 0x3d9021bb3d9021bb;
    auVar834._12_4_ = 0x3d9021bb;
    auVar1238._8_4_ = 0xbdebd1b8;
    auVar1238._0_8_ = 0xbdebd1b8bdebd1b8;
    auVar1238._12_4_ = 0xbdebd1b8;
    auVar1286._8_4_ = 0x3def251a;
    auVar1286._0_8_ = 0x3def251a3def251a;
    auVar1286._12_4_ = 0x3def251a;
    auVar1340._8_4_ = 0xbdfe5d4f;
    auVar1340._0_8_ = 0xbdfe5d4fbdfe5d4f;
    auVar1340._12_4_ = 0xbdfe5d4f;
    auVar1394._8_4_ = 0x3e11e9bf;
    auVar1394._0_8_ = 0x3e11e9bf3e11e9bf;
    auVar1394._12_4_ = 0x3e11e9bf;
    auVar1448._8_4_ = 0xbe2aae50;
    auVar1448._0_8_ = 0xbe2aae50be2aae50;
    auVar1448._12_4_ = 0xbe2aae50;
    auVar1501._8_4_ = 0x3e4cceac;
    auVar1501._0_8_ = 0x3e4cceac3e4cceac;
    auVar1501._12_4_ = 0x3e4cceac;
    auVar1554._8_4_ = 0xbe7ffffc;
    auVar1554._0_8_ = 0xbe7ffffcbe7ffffc;
    auVar1554._12_4_ = 0xbe7ffffc;
    auVar350 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar351 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
    auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar355 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
    auVar356 = vxorps_avx512vl(auVar287,auVar287);
    auVar287 = vpcmpeqd_avx(auVar682,auVar682);
    auVar359 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar360 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar395 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar396 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar296 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
    auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
    auVar299 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
    auVar300 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      uVar283 = vcmpps_avx512vl(*(undefined1 (*) [16])(ptr + uVar279),auVar356,2);
      auVar75._8_4_ = 0x800000;
      auVar75._0_8_ = 0x80000000800000;
      auVar75._12_4_ = 0x800000;
      auVar301 = vmaxps_avx512vl(*(undefined1 (*) [16])(ptr + uVar279),auVar75);
      auVar294 = vpsrld_avx512vl(auVar301,0x17);
      auVar758._8_4_ = 0x807fffff;
      auVar758._0_8_ = 0x807fffff807fffff;
      auVar758._12_4_ = 0x807fffff;
      auVar76._8_4_ = 0x3f000000;
      auVar76._0_8_ = 0x3f0000003f000000;
      auVar76._12_4_ = 0x3f000000;
      auVar301 = vpternlogd_avx512vl(auVar301,auVar758,auVar76,0xea);
      uVar282 = vcmpps_avx512vl(auVar301,auVar1033,1);
      auVar303 = vaddps_avx512vl(auVar301,auVar1088);
      auVar301 = vaddps_avx512vl(auVar303,auVar301);
      bVar281 = (bool)((byte)uVar282 & 1);
      auVar365._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar303._0_4_;
      bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
      auVar365._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar303._4_4_;
      bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
      auVar365._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar303._8_4_;
      bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
      auVar365._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar303._12_4_;
      auVar303 = vmulps_avx512vl(auVar365,auVar365);
      auVar301 = vfmadd213ps_fma(auVar834,auVar365,auVar1238);
      auVar301 = vfmadd213ps_fma(auVar301,auVar365,auVar1286);
      auVar301 = vfmadd213ps_fma(auVar301,auVar365,auVar1340);
      auVar301 = vfmadd213ps_fma(auVar301,auVar365,auVar1394);
      auVar301 = vfmadd213ps_fma(auVar301,auVar365,auVar1448);
      auVar301 = vfmadd213ps_fma(auVar301,auVar365,auVar1501);
      auVar301 = vfmadd213ps_fma(auVar301,auVar365,auVar1554);
      auVar301 = vfmadd213ps_avx512vl(auVar301,auVar365,auVar350);
      auVar288 = vmulps_avx512vl(auVar303,auVar365);
      auVar922._0_4_ = auVar301._0_4_ * auVar288._0_4_;
      auVar922._4_4_ = auVar301._4_4_ * auVar288._4_4_;
      auVar922._8_4_ = auVar301._8_4_ * auVar288._8_4_;
      auVar922._12_4_ = auVar301._12_4_ * auVar288._12_4_;
      auVar301 = vpaddd_avx512vl(auVar294,auVar977);
      auVar301 = vcvtdq2ps_avx(auVar301);
      auVar294 = vsubps_avx512vl(auVar301,auVar1141);
      bVar281 = (bool)((byte)uVar282 & 1);
      auVar366._0_4_ = (uint)bVar281 * auVar294._0_4_ | (uint)!bVar281 * auVar301._0_4_;
      bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
      auVar366._4_4_ = (uint)bVar281 * auVar294._4_4_ | (uint)!bVar281 * auVar301._4_4_;
      bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
      auVar366._8_4_ = (uint)bVar281 * auVar294._8_4_ | (uint)!bVar281 * auVar301._8_4_;
      bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
      auVar366._12_4_ = (uint)bVar281 * auVar294._12_4_ | (uint)!bVar281 * auVar301._12_4_;
      auVar301 = vfmadd231ps_avx512vl(auVar922,auVar366,auVar351);
      auVar301 = vfmsub231ps_avx512vl(auVar301,auVar354,auVar303);
      auVar301 = vsubps_avx(auVar301,auVar365);
      auVar301 = vfmsub231ps_avx512vl(auVar301,auVar355,auVar366);
      bVar281 = (bool)((byte)uVar283 & 1);
      bVar12 = (bool)((byte)(uVar283 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar283 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar759._0_4_ =
           (float)((uint)bVar281 * auVar287._0_4_ | (uint)!bVar281 * auVar301._0_4_) *
           (float)local_f8._0_4_;
      auVar759._4_4_ =
           (float)((uint)bVar12 * auVar287._4_4_ | (uint)!bVar12 * auVar301._4_4_) *
           (float)local_f8._4_4_;
      auVar759._8_4_ =
           (float)((uint)bVar13 * auVar287._8_4_ | (uint)!bVar13 * auVar301._8_4_) * fStack_f0;
      auVar759._12_4_ =
           (float)((uint)bVar14 * auVar287._12_4_ | (uint)!bVar14 * auVar301._12_4_) * fStack_ec;
      auVar301 = vminps_avx512vl(auVar759,auVar359);
      auVar294 = vmaxps_avx512vl(auVar301,auVar360);
      auVar303 = vfmadd231ps_avx512vl(auVar354,auVar294,auVar395);
      auVar1188._0_4_ = (int)auVar303._0_4_;
      auVar1188._4_4_ = (int)auVar303._4_4_;
      auVar1188._8_4_ = (int)auVar303._8_4_;
      auVar1188._12_4_ = (int)auVar303._12_4_;
      auVar301 = vcvtdq2ps_avx(auVar1188);
      uVar283 = vcmpps_avx512vl(auVar303,auVar301,1);
      auVar303 = vsubps_avx512vl(auVar301,auVar1141);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar367._0_4_ = (float)((uint)bVar281 * auVar303._0_4_ | (uint)!bVar281 * auVar301._0_4_);
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar367._4_4_ = (float)((uint)bVar281 * auVar303._4_4_ | (uint)!bVar281 * auVar301._4_4_);
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar367._8_4_ = (float)((uint)bVar281 * auVar303._8_4_ | (uint)!bVar281 * auVar301._8_4_);
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar367._12_4_ = (float)((uint)bVar281 * auVar303._12_4_ | (uint)!bVar281 * auVar301._12_4_);
      auVar301 = vfmsub231ps_avx512vl(auVar294,auVar367,auVar355);
      auVar301 = vfnmsub231ps_avx512vl(auVar301,auVar367,auVar351);
      auVar923._0_4_ = auVar301._0_4_ * auVar301._0_4_;
      auVar923._4_4_ = auVar301._4_4_ * auVar301._4_4_;
      auVar923._8_4_ = auVar301._8_4_ * auVar301._8_4_;
      auVar923._12_4_ = auVar301._12_4_ * auVar301._12_4_;
      auVar294 = vfmadd213ps_avx512vl(auVar396,auVar301,auVar296);
      auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar297);
      auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar298);
      auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar299);
      auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar354);
      auVar301 = vfmadd213ps_avx512vl(auVar294,auVar923,auVar301);
      auVar760._0_4_ = (int)auVar367._0_4_;
      auVar760._4_4_ = (int)auVar367._4_4_;
      auVar760._8_4_ = (int)auVar367._8_4_;
      auVar760._12_4_ = (int)auVar367._12_4_;
      auVar294 = vpslld_avx(auVar760,0x17);
      auVar294 = vpaddd_avx512vl(auVar294,auVar300);
      auVar301 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar294);
      *(undefined1 (*) [16])(outptr + uVar279) = auVar301;
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      pfVar1599 = outptr;
      fVar667 = powf(*(float *)((long)ptr + uVar279 * 4 + lVar280),fVar666);
      *(float *)((long)outptr + uVar279 * 4 + lVar280) = fVar667;
      lVar280 = lVar280 + 4;
      outptr = pfVar1599;
    }
    return;
  case 7:
    iVar278 = bw;
    if (bw < aw) {
      iVar278 = aw;
    }
    iVar276 = bp;
    if (bp < ap) {
      iVar276 = ap;
    }
    iVar277 = iVar276 * iVar278;
    if (ap != bp) {
LAB_003813fd:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (iVar276 == 0x10) {
          iVar277 = 0;
          if (0 < iVar278) {
            iVar277 = iVar278;
          }
          while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
            auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar1594 = vsubps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
          }
        }
        if (iVar276 == 8) {
          for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
            fVar666 = *ptr1;
            fVar667 = ptr1[1];
            auVar777._4_4_ = fVar667;
            auVar777._0_4_ = fVar667;
            auVar777._8_4_ = fVar667;
            auVar777._12_4_ = fVar667;
            auVar777._16_4_ = fVar667;
            auVar777._20_4_ = fVar667;
            auVar777._24_4_ = fVar667;
            auVar777._28_4_ = fVar667;
            auVar1594 = vinsertf64x4_avx512f
                                  (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar777,
                                   1);
            auVar1594 = vsubps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
          }
          for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
            fVar666 = *ptr1;
            auVar692._4_4_ = fVar666;
            auVar692._0_4_ = fVar666;
            auVar692._8_4_ = fVar666;
            auVar692._12_4_ = fVar666;
            auVar692._16_4_ = fVar666;
            auVar692._20_4_ = fVar666;
            auVar692._24_4_ = fVar666;
            auVar692._28_4_ = fVar666;
            auVar411 = vsubps_avx(auVar692,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          }
        }
        if (iVar276 != 4) {
          return;
        }
        for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
          fVar666 = ptr1[uVar279 + 3];
          auVar693._20_4_ = fVar666;
          auVar693._16_4_ = fVar666;
          auVar693._24_4_ = fVar666;
          auVar693._28_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 2];
          auVar693._4_4_ = fVar666;
          auVar693._0_4_ = fVar666;
          auVar693._8_4_ = fVar666;
          auVar693._12_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 1];
          fVar667 = ptr1[uVar279];
          auVar1594 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar693,1);
          auVar1594 = vsubps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
          fVar666 = ptr1[uVar279 + 1];
          auVar694._20_4_ = fVar666;
          auVar694._16_4_ = fVar666;
          auVar694._24_4_ = fVar666;
          auVar694._28_4_ = fVar666;
          fVar666 = ptr1[uVar279];
          auVar694._4_4_ = fVar666;
          auVar694._0_4_ = fVar666;
          auVar694._8_4_ = fVar666;
          auVar694._12_4_ = fVar666;
          auVar411 = vsubps_avx(auVar694,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        lVar280 = 0;
        for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
            uVar283 = (ulong)((int)uVar283 + 1)) {
          uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
          auVar670._4_4_ = uVar1603;
          auVar670._0_4_ = uVar1603;
          auVar670._8_4_ = uVar1603;
          auVar670._12_4_ = uVar1603;
          auVar287 = vsubps_avx(auVar670,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar280 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar287;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (bw == 1) {
        auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        for (iVar278 = 0xf; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
          auVar1595 = vsubps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        fVar666 = *ptr1;
        auVar706._4_4_ = fVar666;
        auVar706._0_4_ = fVar666;
        auVar706._8_4_ = fVar666;
        auVar706._12_4_ = fVar666;
        auVar706._16_4_ = fVar666;
        auVar706._20_4_ = fVar666;
        auVar706._24_4_ = fVar666;
        auVar706._28_4_ = fVar666;
        for (iVar278 = iVar278 + -0xc; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
          auVar411 = vsubps_avx(auVar706,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        fVar666 = *ptr1;
        auVar676._4_4_ = fVar666;
        auVar676._0_4_ = fVar666;
        auVar676._8_4_ = fVar666;
        auVar676._12_4_ = fVar666;
        lVar280 = 0;
        for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
          auVar287 = vsubps_avx(auVar676,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar280 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar287;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar276 == 0x10) {
        auVar1594 = *(undefined1 (*) [64])ptr;
        iVar277 = iVar278;
        while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
          auVar1595 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar1595 = vsubps_avx512f(auVar1595,auVar1594);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
        }
      }
      if (iVar276 == 8) {
        auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
          fVar666 = *ptr1;
          fVar667 = ptr1[1];
          auVar872._4_4_ = fVar667;
          auVar872._0_4_ = fVar667;
          auVar872._8_4_ = fVar667;
          auVar872._12_4_ = fVar667;
          auVar872._16_4_ = fVar667;
          auVar872._20_4_ = fVar667;
          auVar872._24_4_ = fVar667;
          auVar872._28_4_ = fVar667;
          auVar1595 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar872,
                                 1);
          auVar1595 = vsubps_avx512f(auVar1595,auVar1594);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          fVar666 = *ptr1;
          auVar797._4_4_ = fVar666;
          auVar797._0_4_ = fVar666;
          auVar797._8_4_ = fVar666;
          auVar797._12_4_ = fVar666;
          auVar797._16_4_ = fVar666;
          auVar797._20_4_ = fVar666;
          auVar797._24_4_ = fVar666;
          auVar797._28_4_ = fVar666;
          auVar411 = vsubps_avx(auVar797,auVar1594._0_32_);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      if (iVar276 != 4) {
        return;
      }
      auVar1594 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar287 = auVar1594._0_16_;
      auVar798._0_16_ = ZEXT116(0) * auVar287 + ZEXT116(1) * auVar287;
      auVar798._16_16_ = ZEXT116(0) * auVar1594._16_16_ + ZEXT116(1) * auVar287;
      for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
        fVar666 = ptr1[uVar279 + 3];
        auVar873._20_4_ = fVar666;
        auVar873._16_4_ = fVar666;
        auVar873._24_4_ = fVar666;
        auVar873._28_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 2];
        auVar873._4_4_ = fVar666;
        auVar873._0_4_ = fVar666;
        auVar873._8_4_ = fVar666;
        auVar873._12_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        auVar1595 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar873,1);
        auVar1595 = vsubps_avx512f(auVar1595,auVar1594);
        *(undefined1 (*) [64])outptr = auVar1595;
        outptr = (float *)((long)outptr + 0x40);
      }
      for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
        fVar666 = ptr1[uVar279 + 1];
        auVar874._20_4_ = fVar666;
        auVar874._16_4_ = fVar666;
        auVar874._24_4_ = fVar666;
        auVar874._28_4_ = fVar666;
        fVar666 = ptr1[uVar279];
        auVar874._4_4_ = fVar666;
        auVar874._0_4_ = fVar666;
        auVar874._8_4_ = fVar666;
        auVar874._12_4_ = fVar666;
        auVar411 = vsubps_avx(auVar874,auVar798);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
        auVar748._4_4_ = uVar1603;
        auVar748._0_4_ = uVar1603;
        auVar748._8_4_ = uVar1603;
        auVar748._12_4_ = uVar1603;
        auVar350 = vsubps_avx(auVar748,auVar287);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar350;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw == bw) {
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1594 = vsubps_avx512f(*(undefined1 (*) [64])(ptr1 + uVar279),
                                   *(undefined1 (*) [64])(ptr + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1594;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = vsubps_avx(*(undefined1 (*) [32])(ptr1 + uVar279),
                              *(undefined1 (*) [32])(ptr + uVar279));
        *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar287 = vsubps_avx(*(undefined1 (*) [16])(ptr1 + uVar279),
                              *(undefined1 (*) [16])(ptr + uVar279));
        *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        *(float *)((long)outptr + uVar279 * 4 + lVar280) =
             *(float *)((long)ptr1 + uVar279 * 4 + lVar280) -
             *(float *)((long)ptr + uVar279 * 4 + lVar280);
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003813fd;
      fVar666 = *ptr;
      if (iVar276 == 4) {
        auVar754 = *(undefined1 (*) [16])ptr;
        auVar1594 = ZEXT3264(CONCAT1616(auVar754,auVar754));
      }
      else {
        auVar754._4_4_ = fVar666;
        auVar754._0_4_ = fVar666;
        auVar754._8_4_ = fVar666;
        auVar754._12_4_ = fVar666;
        if (iVar276 == 8) {
          auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar903._4_4_ = fVar666;
          auVar903._0_4_ = fVar666;
          auVar903._8_4_ = fVar666;
          auVar903._12_4_ = fVar666;
          auVar903._16_4_ = fVar666;
          auVar903._20_4_ = fVar666;
          auVar903._24_4_ = fVar666;
          auVar903._28_4_ = fVar666;
          auVar1594 = ZEXT3264(auVar903);
          if (iVar276 == 0x10) {
            auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_0038b5b4;
          }
        }
      }
      auVar903 = auVar1594._0_32_;
      auVar1594 = vinserti64x4_avx512f(auVar1594,auVar903,1);
LAB_0038b5b4:
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1595 = vsubps_avx512f(*(undefined1 (*) [64])(ptr1 + uVar279),auVar1594);
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = vsubps_avx(*(undefined1 (*) [32])(ptr1 + uVar279),auVar903);
        *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar287 = vsubps_avx(*(undefined1 (*) [16])(ptr1 + uVar279),auVar754);
        *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        *(float *)((long)outptr + uVar279 * 4 + lVar280) =
             *(float *)((long)ptr1 + uVar279 * 4 + lVar280) - fVar666;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    fVar666 = *ptr1;
    if (iVar276 == 4) {
      auVar743 = *(undefined1 (*) [16])ptr1;
      auVar1594 = ZEXT3264(CONCAT1616(auVar743,auVar743));
    }
    else {
      auVar743._4_4_ = fVar666;
      auVar743._0_4_ = fVar666;
      auVar743._8_4_ = fVar666;
      auVar743._12_4_ = fVar666;
      if (iVar276 == 8) {
        auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar885._4_4_ = fVar666;
        auVar885._0_4_ = fVar666;
        auVar885._8_4_ = fVar666;
        auVar885._12_4_ = fVar666;
        auVar885._16_4_ = fVar666;
        auVar885._20_4_ = fVar666;
        auVar885._24_4_ = fVar666;
        auVar885._28_4_ = fVar666;
        auVar1594 = ZEXT3264(auVar885);
        if (iVar276 == 0x10) {
          auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_003878fb;
        }
      }
    }
    auVar885 = auVar1594._0_32_;
    auVar1594 = vinserti64x4_avx512f(auVar1594,auVar885,1);
LAB_003878fb:
    for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar1595 = vsubps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr + uVar279));
      *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
    }
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      auVar411 = vsubps_avx(auVar885,*(undefined1 (*) [32])(ptr + uVar279));
      *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
    }
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      auVar287 = vsubps_avx(auVar743,*(undefined1 (*) [16])(ptr + uVar279));
      *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      *(float *)((long)outptr + uVar279 * 4 + lVar280) =
           fVar666 - *(float *)((long)ptr + uVar279 * 4 + lVar280);
      lVar280 = lVar280 + 4;
    }
    return;
  case 8:
    iVar278 = bw;
    if (bw < aw) {
      iVar278 = aw;
    }
    iVar276 = bp;
    if (bp < ap) {
      iVar276 = ap;
    }
    iVar277 = iVar276 * iVar278;
    if (ap != bp) {
LAB_00382341:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (iVar276 == 0x10) {
          iVar277 = 0;
          if (0 < iVar278) {
            iVar277 = iVar278;
          }
          while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
            auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar1594 = vdivps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
          }
        }
        if (iVar276 == 8) {
          for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
            fVar666 = *ptr1;
            fVar667 = ptr1[1];
            auVar782._4_4_ = fVar667;
            auVar782._0_4_ = fVar667;
            auVar782._8_4_ = fVar667;
            auVar782._12_4_ = fVar667;
            auVar782._16_4_ = fVar667;
            auVar782._20_4_ = fVar667;
            auVar782._24_4_ = fVar667;
            auVar782._28_4_ = fVar667;
            auVar1594 = vinsertf64x4_avx512f
                                  (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar782,
                                   1);
            auVar1594 = vdivps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
          }
          for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
            fVar666 = *ptr1;
            auVar699._4_4_ = fVar666;
            auVar699._0_4_ = fVar666;
            auVar699._8_4_ = fVar666;
            auVar699._12_4_ = fVar666;
            auVar699._16_4_ = fVar666;
            auVar699._20_4_ = fVar666;
            auVar699._24_4_ = fVar666;
            auVar699._28_4_ = fVar666;
            auVar411 = vdivps_avx(auVar699,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          }
        }
        if (iVar276 != 4) {
          return;
        }
        for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
          fVar666 = ptr1[uVar279 + 3];
          auVar700._20_4_ = fVar666;
          auVar700._16_4_ = fVar666;
          auVar700._24_4_ = fVar666;
          auVar700._28_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 2];
          auVar700._4_4_ = fVar666;
          auVar700._0_4_ = fVar666;
          auVar700._8_4_ = fVar666;
          auVar700._12_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 1];
          fVar667 = ptr1[uVar279];
          auVar1594 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar700,1);
          auVar1594 = vdivps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
          fVar666 = ptr1[uVar279 + 1];
          auVar701._20_4_ = fVar666;
          auVar701._16_4_ = fVar666;
          auVar701._24_4_ = fVar666;
          auVar701._28_4_ = fVar666;
          fVar666 = ptr1[uVar279];
          auVar701._4_4_ = fVar666;
          auVar701._0_4_ = fVar666;
          auVar701._8_4_ = fVar666;
          auVar701._12_4_ = fVar666;
          auVar411 = vdivps_avx(auVar701,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        lVar280 = 0;
        for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
            uVar283 = (ulong)((int)uVar283 + 1)) {
          uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
          auVar671._4_4_ = uVar1603;
          auVar671._0_4_ = uVar1603;
          auVar671._8_4_ = uVar1603;
          auVar671._12_4_ = uVar1603;
          auVar287 = vdivps_avx(auVar671,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar280 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar287;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (bw == 1) {
        auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        for (iVar278 = 0xf; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
          auVar1595 = vdivps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        fVar666 = *ptr1;
        auVar710._4_4_ = fVar666;
        auVar710._0_4_ = fVar666;
        auVar710._8_4_ = fVar666;
        auVar710._12_4_ = fVar666;
        auVar710._16_4_ = fVar666;
        auVar710._20_4_ = fVar666;
        auVar710._24_4_ = fVar666;
        auVar710._28_4_ = fVar666;
        for (iVar278 = iVar278 + -0xc; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
          auVar411 = vdivps_avx(auVar710,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        fVar666 = *ptr1;
        auVar680._4_4_ = fVar666;
        auVar680._0_4_ = fVar666;
        auVar680._8_4_ = fVar666;
        auVar680._12_4_ = fVar666;
        lVar280 = 0;
        for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
          auVar287 = vdivps_avx(auVar680,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar280 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar287;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar276 == 0x10) {
        auVar1594 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar1594 = vdivps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
        iVar277 = iVar278;
        while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
          fVar666 = *ptr1;
          auVar574._4_4_ = fVar666;
          auVar574._0_4_ = fVar666;
          auVar574._8_4_ = fVar666;
          auVar574._12_4_ = fVar666;
          auVar574._16_4_ = fVar666;
          auVar574._20_4_ = fVar666;
          auVar574._24_4_ = fVar666;
          auVar574._28_4_ = fVar666;
          auVar574._32_4_ = fVar666;
          auVar574._36_4_ = fVar666;
          auVar574._40_4_ = fVar666;
          auVar574._44_4_ = fVar666;
          auVar574._48_4_ = fVar666;
          auVar574._52_4_ = fVar666;
          auVar574._56_4_ = fVar666;
          auVar574._60_4_ = fVar666;
          auVar1595 = vmulps_avx512f(auVar1594,auVar574);
          *(undefined1 (*) [64])outptr = auVar1595;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
        }
      }
      if (iVar276 == 8) {
        auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        auVar1595 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar1595 = vdivps_avx512f(auVar1595,auVar1594);
        for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
          fVar666 = *ptr1;
          fVar667 = ptr1[1];
          auVar943._4_4_ = fVar667;
          auVar943._0_4_ = fVar667;
          auVar943._8_4_ = fVar667;
          auVar943._12_4_ = fVar667;
          auVar943._16_4_ = fVar667;
          auVar943._20_4_ = fVar667;
          auVar943._24_4_ = fVar667;
          auVar943._28_4_ = fVar667;
          auVar632 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar943,
                                1);
          auVar632 = vmulps_avx512f(auVar632,auVar1595);
          *(undefined1 (*) [64])outptr = auVar632;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
        }
        auVar808._8_4_ = 0x3f800000;
        auVar808._0_8_ = 0x3f8000003f800000;
        auVar808._12_4_ = 0x3f800000;
        auVar808._16_4_ = 0x3f800000;
        auVar808._20_4_ = 0x3f800000;
        auVar808._24_4_ = 0x3f800000;
        auVar808._28_4_ = 0x3f800000;
        auVar411 = vdivps_avx(auVar808,auVar1594._0_32_);
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          fVar666 = *ptr1;
          auVar148._4_4_ = fVar666;
          auVar148._0_4_ = fVar666;
          auVar148._8_4_ = fVar666;
          auVar148._12_4_ = fVar666;
          auVar148._16_4_ = fVar666;
          auVar148._20_4_ = fVar666;
          auVar148._24_4_ = fVar666;
          auVar148._28_4_ = fVar666;
          auVar495 = vmulps_avx512vl(auVar411,auVar148);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar495;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      if (iVar276 != 4) {
        return;
      }
      auVar1594 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar287 = auVar1594._0_16_;
      auVar809._0_16_ = ZEXT116(0) * auVar287 + ZEXT116(1) * auVar287;
      auVar809._16_16_ = ZEXT116(0) * auVar1594._16_16_ + ZEXT116(1) * auVar287;
      auVar1595 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar1594 = vdivps_avx512f(auVar1595,auVar1594);
      for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
        fVar666 = ptr1[uVar279 + 3];
        auVar955._20_4_ = fVar666;
        auVar955._16_4_ = fVar666;
        auVar955._24_4_ = fVar666;
        auVar955._28_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 2];
        auVar955._4_4_ = fVar666;
        auVar955._0_4_ = fVar666;
        auVar955._8_4_ = fVar666;
        auVar955._12_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        auVar1595 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar955,1);
        auVar1595 = vmulps_avx512f(auVar1595,auVar1594);
        *(undefined1 (*) [64])outptr = auVar1595;
        outptr = (float *)((long)outptr + 0x40);
      }
      auVar898._8_4_ = 0x3f800000;
      auVar898._0_8_ = 0x3f8000003f800000;
      auVar898._12_4_ = 0x3f800000;
      auVar898._16_4_ = 0x3f800000;
      auVar898._20_4_ = 0x3f800000;
      auVar898._24_4_ = 0x3f800000;
      auVar898._28_4_ = 0x3f800000;
      auVar411 = vdivps_avx(auVar898,auVar809);
      for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        *(float *)*(undefined1 (*) [64])outptr = fVar667 * auVar411._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar667 * auVar411._4_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar667 * auVar411._8_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar667 * auVar411._12_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar666 * auVar411._16_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar666 * auVar411._20_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar666 * auVar411._24_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar666;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
      auVar766._8_4_ = 0x3f800000;
      auVar766._0_8_ = 0x3f8000003f800000;
      auVar766._12_4_ = 0x3f800000;
      auVar287 = vdivps_avx(auVar766,auVar287);
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
        auVar72._4_4_ = uVar1603;
        auVar72._0_4_ = uVar1603;
        auVar72._8_4_ = uVar1603;
        auVar72._12_4_ = uVar1603;
        auVar350 = vmulps_avx512vl(auVar287,auVar72);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar350;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw == bw) {
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1594 = vdivps_avx512f(*(undefined1 (*) [64])(ptr1 + uVar279),
                                   *(undefined1 (*) [64])(ptr + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1594;
      }
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = vdivps_avx(*(undefined1 (*) [32])(ptr1 + uVar279),
                              *(undefined1 (*) [32])(ptr + uVar279));
        *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
      }
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar287 = vdivps_avx(*(undefined1 (*) [16])(ptr1 + uVar279),
                              *(undefined1 (*) [16])(ptr + uVar279));
        *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        *(float *)((long)outptr + uVar279 * 4 + lVar280) =
             *(float *)((long)ptr1 + uVar279 * 4 + lVar280) /
             *(float *)((long)ptr + uVar279 * 4 + lVar280);
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_00382341;
      fVar666 = *ptr;
      if (iVar276 == 4) {
        auVar762 = *(undefined1 (*) [16])ptr;
        auVar1594 = ZEXT3264(CONCAT1616(auVar762,auVar762));
      }
      else {
        auVar762._4_4_ = fVar666;
        auVar762._0_4_ = fVar666;
        auVar762._8_4_ = fVar666;
        auVar762._12_4_ = fVar666;
        if (iVar276 == 8) {
          auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar907._4_4_ = fVar666;
          auVar907._0_4_ = fVar666;
          auVar907._8_4_ = fVar666;
          auVar907._12_4_ = fVar666;
          auVar907._16_4_ = fVar666;
          auVar907._20_4_ = fVar666;
          auVar907._24_4_ = fVar666;
          auVar907._28_4_ = fVar666;
          auVar1594 = ZEXT3264(auVar907);
          if (iVar276 == 0x10) {
            auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_0038c329;
          }
        }
      }
      auVar907 = auVar1594._0_32_;
      auVar1594 = vinserti64x4_avx512f(auVar1594,auVar907,1);
LAB_0038c329:
      auVar1595 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar1594 = vdivps_avx512f(auVar1595,auVar1594);
      for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar1595 = vmulps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr1 + uVar279));
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
      }
      auVar959._8_4_ = 0x3f800000;
      auVar959._0_8_ = 0x3f8000003f800000;
      auVar959._12_4_ = 0x3f800000;
      auVar959._16_4_ = 0x3f800000;
      auVar959._20_4_ = 0x3f800000;
      auVar959._24_4_ = 0x3f800000;
      auVar959._28_4_ = 0x3f800000;
      auVar411 = vdivps_avx(auVar959,auVar907);
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        pfVar1599 = ptr1 + uVar279;
        auVar232._4_4_ = auVar411._4_4_ * pfVar1599[1];
        auVar232._0_4_ = auVar411._0_4_ * *pfVar1599;
        auVar232._8_4_ = auVar411._8_4_ * pfVar1599[2];
        auVar232._12_4_ = auVar411._12_4_ * pfVar1599[3];
        auVar232._16_4_ = auVar411._16_4_ * pfVar1599[4];
        auVar232._20_4_ = auVar411._20_4_ * pfVar1599[5];
        auVar232._24_4_ = auVar411._24_4_ * pfVar1599[6];
        auVar232._28_4_ = auVar959._28_4_;
        *(undefined1 (*) [32])(outptr + uVar279) = auVar232;
        auVar959 = auVar232;
      }
      auVar845._8_4_ = 0x3f800000;
      auVar845._0_8_ = 0x3f8000003f800000;
      auVar845._12_4_ = 0x3f800000;
      auVar287 = vdivps_avx(auVar845,auVar762);
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        pfVar1599 = ptr1 + uVar279;
        fVar667 = pfVar1599[1];
        fVar1604 = pfVar1599[2];
        fVar730 = pfVar1599[3];
        pfVar1601 = outptr + uVar279;
        *pfVar1601 = auVar287._0_4_ * *pfVar1599;
        pfVar1601[1] = auVar287._4_4_ * fVar667;
        pfVar1601[2] = auVar287._8_4_ * fVar1604;
        pfVar1601[3] = auVar287._12_4_ * fVar730;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        *(float *)((long)outptr + uVar279 * 4 + lVar280) =
             (1.0 / fVar666) * *(float *)((long)ptr1 + uVar279 * 4 + lVar280);
        lVar280 = lVar280 + 4;
      }
      return;
    }
    fVar666 = *ptr1;
    if (iVar276 == 4) {
      auVar747 = *(undefined1 (*) [16])ptr1;
      auVar1594 = ZEXT3264(CONCAT1616(auVar747,auVar747));
    }
    else {
      auVar747._4_4_ = fVar666;
      auVar747._0_4_ = fVar666;
      auVar747._8_4_ = fVar666;
      auVar747._12_4_ = fVar666;
      if (iVar276 == 8) {
        auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar891._4_4_ = fVar666;
        auVar891._0_4_ = fVar666;
        auVar891._8_4_ = fVar666;
        auVar891._12_4_ = fVar666;
        auVar891._16_4_ = fVar666;
        auVar891._20_4_ = fVar666;
        auVar891._24_4_ = fVar666;
        auVar891._28_4_ = fVar666;
        auVar1594 = ZEXT3264(auVar891);
        if (iVar276 == 0x10) {
          auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_00388731;
        }
      }
    }
    auVar891 = auVar1594._0_32_;
    auVar1594 = vinserti64x4_avx512f(auVar1594,auVar891,1);
LAB_00388731:
    for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar1595 = vdivps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr + uVar279));
      *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
    }
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      auVar411 = vdivps_avx(auVar891,*(undefined1 (*) [32])(ptr + uVar279));
      *(undefined1 (*) [32])(outptr + uVar279) = auVar411;
    }
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      auVar287 = vdivps_avx(auVar747,*(undefined1 (*) [16])(ptr + uVar279));
      *(undefined1 (*) [16])(outptr + uVar279) = auVar287;
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      *(float *)((long)outptr + uVar279 * 4 + lVar280) =
           fVar666 / *(float *)((long)ptr + uVar279 * 4 + lVar280);
      lVar280 = lVar280 + 4;
    }
    return;
  case 9:
    iVar278 = bw;
    if (bw < aw) {
      iVar278 = aw;
    }
    iVar276 = bp;
    if (bp < ap) {
      iVar276 = ap;
    }
    iVar277 = iVar276 * iVar278;
    if (ap != bp) {
LAB_003809ba:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (iVar276 == 0x10) {
          auVar1594 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar632 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar573 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar650 = vpxord_avx512f(auVar1594,auVar573);
          auVar574 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar575 = vpxord_avx512f(auVar574,auVar573);
          auVar573 = vpxord_avx512f(auVar632,auVar573);
          iVar277 = 0;
          if (0 < iVar278) {
            iVar277 = iVar278;
          }
          auVar287 = vxorps_avx512vl(auVar287,auVar287);
          in_ZMM29 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
            auVar576 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar577 = vmaxps_avx512f(auVar576,(undefined1  [64])_ps512_min_norm_pos);
            auVar578 = vpsrld_avx512f(auVar577,0x17);
            auVar577 = vpternlogd_avx512f(auVar577,auVar1594,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar279 = vcmpps_avx512f(auVar577,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar579 = vsubps_avx512f(auVar577,(undefined1  [64])afVar254);
            auVar577 = vaddps_avx512f(auVar579,auVar577);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar587._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar579._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar587._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar579._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar587._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar579._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar587._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar579._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar587._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar579._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar587._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar579._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar587._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar579._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar587._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar579._28_4_;
            bVar11 = (byte)(uVar279 >> 8);
            bVar281 = (bool)(bVar11 & 1);
            auVar587._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar579._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar587._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar579._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar587._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar579._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar587._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar579._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar587._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar579._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar587._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar579._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar587._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar579._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar587._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar579._60_4_;
            auVar577 = vmulps_avx512f(auVar587,auVar587);
            auVar579 = vfmadd132ps_avx512f(auVar587,(undefined1  [64])afVar266,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar579 = vfmadd213ps_avx512f(auVar579,auVar587,(undefined1  [64])afVar267);
            auVar579 = vfmadd213ps_avx512f(auVar579,auVar587,(undefined1  [64])afVar268);
            auVar579 = vfmadd213ps_avx512f(auVar579,auVar587,(undefined1  [64])afVar269);
            auVar579 = vfmadd213ps_avx512f(auVar579,auVar587,(undefined1  [64])afVar270);
            auVar579 = vfmadd213ps_avx512f(auVar579,auVar587,(undefined1  [64])afVar271);
            auVar579 = vfmadd213ps_avx512f(auVar579,auVar587,(undefined1  [64])afVar272);
            auVar579 = vfmadd213ps_avx512f(auVar579,auVar587,(undefined1  [64])afVar273);
            auVar580 = vmulps_avx512f(auVar577,auVar587);
            auVar579 = vfmadd213ps_avx512f(auVar580,auVar579,auVar587);
            uVar283 = vcmpps_avx512f(auVar576,ZEXT1664(auVar287),2);
            auVar576 = vpsubd_avx512f(auVar578,auVar1595);
            auVar576 = vcvtdq2ps_avx512f(auVar576);
            auVar578 = vaddps_avx512f(auVar576,(undefined1  [64])afVar254);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar588._0_4_ = (uint)bVar281 * auVar576._0_4_ | (uint)!bVar281 * auVar578._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar588._4_4_ = (uint)bVar281 * auVar576._4_4_ | (uint)!bVar281 * auVar578._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar588._8_4_ = (uint)bVar281 * auVar576._8_4_ | (uint)!bVar281 * auVar578._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar588._12_4_ = (uint)bVar281 * auVar576._12_4_ | (uint)!bVar281 * auVar578._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar588._16_4_ = (uint)bVar281 * auVar576._16_4_ | (uint)!bVar281 * auVar578._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar588._20_4_ = (uint)bVar281 * auVar576._20_4_ | (uint)!bVar281 * auVar578._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar588._24_4_ = (uint)bVar281 * auVar576._24_4_ | (uint)!bVar281 * auVar578._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar588._28_4_ = (uint)bVar281 * auVar576._28_4_ | (uint)!bVar281 * auVar578._28_4_;
            bVar281 = (bool)(bVar11 & 1);
            auVar588._32_4_ = (uint)bVar281 * auVar576._32_4_ | (uint)!bVar281 * auVar578._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar588._36_4_ = (uint)bVar281 * auVar576._36_4_ | (uint)!bVar281 * auVar578._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar588._40_4_ = (uint)bVar281 * auVar576._40_4_ | (uint)!bVar281 * auVar578._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar588._44_4_ = (uint)bVar281 * auVar576._44_4_ | (uint)!bVar281 * auVar578._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar588._48_4_ = (uint)bVar281 * auVar576._48_4_ | (uint)!bVar281 * auVar578._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar588._52_4_ = (uint)bVar281 * auVar576._52_4_ | (uint)!bVar281 * auVar578._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar588._56_4_ = (uint)bVar281 * auVar576._56_4_ | (uint)!bVar281 * auVar578._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar588._60_4_ = (uint)bVar281 * auVar576._60_4_ | (uint)!bVar281 * auVar578._60_4_;
            auVar576 = vfmadd231ps_avx512f(auVar579,auVar588,auVar632);
            auVar576 = vfmadd231ps_avx512f(auVar576,auVar650,auVar577);
            auVar576 = vfmadd231ps_avx512f(auVar576,auVar574,auVar588);
            bVar281 = (bool)((byte)uVar283 & 1);
            auVar577._0_4_ = (uint)bVar281 * in_ZMM29._0_4_ | (uint)!bVar281 * auVar576._0_4_;
            bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
            auVar577._4_4_ = (uint)bVar281 * in_ZMM29._4_4_ | (uint)!bVar281 * auVar576._4_4_;
            bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
            auVar577._8_4_ = (uint)bVar281 * in_ZMM29._8_4_ | (uint)!bVar281 * auVar576._8_4_;
            bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
            auVar577._12_4_ = (uint)bVar281 * in_ZMM29._12_4_ | (uint)!bVar281 * auVar576._12_4_;
            bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
            auVar577._16_4_ = (uint)bVar281 * in_ZMM29._16_4_ | (uint)!bVar281 * auVar576._16_4_;
            bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
            auVar577._20_4_ = (uint)bVar281 * in_ZMM29._20_4_ | (uint)!bVar281 * auVar576._20_4_;
            bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
            auVar577._24_4_ = (uint)bVar281 * in_ZMM29._24_4_ | (uint)!bVar281 * auVar576._24_4_;
            bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
            auVar577._28_4_ = (uint)bVar281 * in_ZMM29._28_4_ | (uint)!bVar281 * auVar576._28_4_;
            bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
            auVar577._32_4_ = (uint)bVar281 * in_ZMM29._32_4_ | (uint)!bVar281 * auVar576._32_4_;
            bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
            auVar577._36_4_ = (uint)bVar281 * in_ZMM29._36_4_ | (uint)!bVar281 * auVar576._36_4_;
            bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
            auVar577._40_4_ = (uint)bVar281 * in_ZMM29._40_4_ | (uint)!bVar281 * auVar576._40_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
            auVar577._44_4_ = (uint)bVar281 * in_ZMM29._44_4_ | (uint)!bVar281 * auVar576._44_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
            auVar577._48_4_ = (uint)bVar281 * in_ZMM29._48_4_ | (uint)!bVar281 * auVar576._48_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
            auVar577._52_4_ = (uint)bVar281 * in_ZMM29._52_4_ | (uint)!bVar281 * auVar576._52_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
            auVar577._56_4_ = (uint)bVar281 * in_ZMM29._56_4_ | (uint)!bVar281 * auVar576._56_4_;
            bVar281 = SUB81(uVar283 >> 0xf,0);
            auVar577._60_4_ = (uint)bVar281 * in_ZMM29._60_4_ | (uint)!bVar281 * auVar576._60_4_;
            auVar576 = vmulps_avx512f(auVar577,*(undefined1 (*) [64])ptr);
            auVar576 = vminps_avx512f(auVar576,(undefined1  [64])afVar255);
            auVar576 = vmaxps_avx512f(auVar576,(undefined1  [64])afVar256);
            auVar577 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar576,auVar1594);
            auVar578 = vrndscaleps_avx512f(auVar577,1);
            uVar279 = vcmpps_avx512f(auVar577,auVar578,1);
            auVar577 = vsubps_avx512f(auVar578,(undefined1  [64])afVar254);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar589._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar578._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar589._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar578._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar589._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar578._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar589._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar578._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar589._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar578._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar589._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar578._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar589._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar578._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar589._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar578._28_4_;
            bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
            auVar589._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar578._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar589._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar578._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar589._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar578._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar589._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar578._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar589._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar578._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar589._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar578._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar589._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar578._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar589._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar578._60_4_;
            auVar576 = vfmadd231ps_avx512f(auVar576,auVar589,auVar575);
            auVar576 = vfmadd231ps_avx512f(auVar576,auVar589,auVar573);
            auVar577 = vmulps_avx512f(auVar576,auVar576);
            auVar578 = vfmadd213ps_avx512f(auVar576,(undefined1  [64])afVar258,
                                           (undefined1  [64])afVar259);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar260);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar261);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar262);
            auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,auVar1594);
            auVar576 = vfmadd213ps_avx512f(auVar578,auVar577,auVar576);
            auVar576 = vaddps_avx512f(auVar576,(undefined1  [64])afVar254);
            auVar577 = vcvttps2dq_avx512f(auVar589);
            auVar577 = vpaddd_avx512f(auVar577,auVar1595);
            auVar577 = vpslld_avx512f(auVar577,0x17);
            auVar576 = vmulps_avx512f(auVar576,auVar577);
            *(undefined1 (*) [64])outptr = auVar576;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
          }
        }
        afVar270 = _ps512_cephes_log_p8;
        afVar269 = _ps512_cephes_log_p7;
        afVar268 = _ps512_cephes_log_p6;
        afVar267 = _ps512_cephes_log_p5;
        afVar266 = _ps512_cephes_log_p4;
        afVar265 = _ps512_cephes_log_p3;
        afVar263 = _ps512_cephes_log_p2;
        afVar262 = _ps512_cephes_log_p1;
        afVar261 = ::_ps512_cephes_exp_p4;
        afVar260 = ::_ps512_cephes_exp_p3;
        afVar259 = ::_ps512_cephes_exp_p2;
        afVar258 = ::_ps512_cephes_exp_p1;
        afVar257 = ::_ps512_cephes_exp_p0;
        afVar256 = ::_ps512_cephes_LOG2EF;
        afVar255 = ::_ps512_exp_lo;
        afVar254 = ::_ps512_exp_hi;
        if (iVar276 == 8) {
          auVar1594 = vmovdqa64_avx512f((undefined1  [64])::_ps512_1);
          auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar632 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar573 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar650 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar574 = vpxord_avx512f(auVar1595,auVar573);
          auVar575 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar576 = vpxord_avx512f(auVar575,auVar573);
          auVar573 = vpxord_avx512f(auVar650,auVar573);
          iVar277 = 0;
          auVar287 = vxorps_avx512vl(auVar287,auVar287);
          auVar577 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          for (; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
            auVar411 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar495 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar578 = vinsertf64x4_avx512f(ZEXT3264(auVar411),auVar495,1);
            auVar579 = vmaxps_avx512f(auVar578,(undefined1  [64])_ps512_min_norm_pos);
            auVar580 = vpsrld_avx512f(auVar579,0x17);
            auVar579 = vpternlogd_avx512f(auVar579,auVar1595,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar279 = vcmpps_avx512f(auVar579,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar582 = vsubps_avx512f(auVar579,auVar1594);
            auVar579 = vaddps_avx512f(auVar582,auVar579);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar594._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar582._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar594._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar582._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar594._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar582._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar594._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar582._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar594._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar582._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar594._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar582._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar594._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar582._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar594._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar582._28_4_;
            bVar11 = (byte)(uVar279 >> 8);
            bVar281 = (bool)(bVar11 & 1);
            auVar594._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar582._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar594._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar582._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar594._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar582._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar594._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar582._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar594._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar582._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar594._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar582._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar594._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar582._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar594._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar582._60_4_;
            auVar579 = vmulps_avx512f(auVar594,auVar594);
            auVar582 = vfmadd132ps_avx512f(auVar594,(undefined1  [64])afVar262,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar582 = vfmadd213ps_avx512f(auVar582,auVar594,(undefined1  [64])afVar263);
            auVar582 = vfmadd213ps_avx512f(auVar582,auVar594,(undefined1  [64])afVar265);
            auVar582 = vfmadd213ps_avx512f(auVar582,auVar594,(undefined1  [64])afVar266);
            auVar582 = vfmadd213ps_avx512f(auVar582,auVar594,(undefined1  [64])afVar267);
            auVar582 = vfmadd213ps_avx512f(auVar582,auVar594,(undefined1  [64])afVar268);
            auVar582 = vfmadd213ps_avx512f(auVar582,auVar594,(undefined1  [64])afVar269);
            auVar582 = vfmadd213ps_avx512f(auVar582,auVar594,(undefined1  [64])afVar270);
            auVar581 = vmulps_avx512f(auVar579,auVar594);
            auVar582 = vfmadd213ps_avx512f(auVar581,auVar582,auVar594);
            uVar283 = vcmpps_avx512f(auVar578,ZEXT1664(auVar287),2);
            auVar578 = vpsubd_avx512f(auVar580,auVar632);
            auVar578 = vcvtdq2ps_avx512f(auVar578);
            auVar580 = vaddps_avx512f(auVar578,auVar1594);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar595._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar580._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar595._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar580._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar595._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar580._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar595._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar580._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar595._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar580._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar595._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar580._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar595._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar580._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar595._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar580._28_4_;
            bVar281 = (bool)(bVar11 & 1);
            auVar595._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar580._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar595._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar580._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar595._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar580._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar595._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar580._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar595._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar580._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar595._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar580._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar595._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar580._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar595._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar580._60_4_;
            auVar578 = vfmadd231ps_avx512f(auVar582,auVar595,auVar650);
            auVar578 = vfmadd231ps_avx512f(auVar578,auVar574,auVar579);
            auVar578 = vfmadd231ps_avx512f(auVar578,auVar575,auVar595);
            bVar281 = (bool)((byte)uVar283 & 1);
            auVar596._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar578._0_4_;
            bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
            auVar596._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar578._4_4_;
            bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
            auVar596._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar578._8_4_;
            bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
            auVar596._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar578._12_4_;
            bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
            auVar596._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar578._16_4_;
            bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
            auVar596._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar578._20_4_;
            bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
            auVar596._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar578._24_4_;
            bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
            auVar596._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar578._28_4_;
            bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
            auVar596._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar578._32_4_;
            bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
            auVar596._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar578._36_4_;
            bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
            auVar596._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar578._40_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
            auVar596._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar578._44_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
            auVar596._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar578._48_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
            auVar596._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar578._52_4_;
            bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
            auVar596._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar578._56_4_;
            bVar281 = SUB81(uVar283 >> 0xf,0);
            auVar596._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar578._60_4_;
            auVar578 = vmulps_avx512f(auVar596,*(undefined1 (*) [64])ptr);
            auVar578 = vminps_avx512f(auVar578,(undefined1  [64])afVar254);
            auVar578 = vmaxps_avx512f(auVar578,(undefined1  [64])afVar255);
            auVar579 = vfmadd213ps_avx512f((undefined1  [64])afVar256,auVar578,auVar1595);
            auVar580 = vrndscaleps_avx512f(auVar579,1);
            uVar279 = vcmpps_avx512f(auVar579,auVar580,1);
            auVar579 = vsubps_avx512f(auVar580,auVar1594);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar597._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar580._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar597._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar580._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar597._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar580._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar597._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar580._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar597._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar580._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar597._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar580._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar597._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar580._24_4_;
            bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
            auVar597._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar580._28_4_;
            bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
            auVar597._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar580._32_4_;
            bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
            auVar597._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar580._36_4_;
            bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
            auVar597._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar580._40_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
            auVar597._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar580._44_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
            auVar597._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar580._48_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
            auVar597._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar580._52_4_;
            bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
            auVar597._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar580._56_4_;
            bVar281 = SUB81(uVar279 >> 0xf,0);
            auVar597._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar580._60_4_;
            auVar578 = vfmadd231ps_avx512f(auVar578,auVar597,auVar576);
            auVar578 = vfmadd231ps_avx512f(auVar578,auVar597,auVar573);
            auVar579 = vmulps_avx512f(auVar578,auVar578);
            auVar580 = vfmadd213ps_avx512f(auVar578,(undefined1  [64])afVar257,
                                           (undefined1  [64])afVar258);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar259);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar260);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar261);
            auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,auVar1595);
            auVar578 = vfmadd213ps_avx512f(auVar580,auVar579,auVar578);
            auVar578 = vaddps_avx512f(auVar578,auVar1594);
            auVar579 = vcvttps2dq_avx512f(auVar597);
            auVar579 = vpaddd_avx512f(auVar579,auVar632);
            auVar579 = vpslld_avx512f(auVar579,0x17);
            auVar578 = vmulps_avx512f(auVar578,auVar579);
            *(undefined1 (*) [64])outptr = auVar578;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
          }
          auVar937._8_4_ = 0xffffff82;
          auVar937._0_8_ = 0xffffff82ffffff82;
          auVar937._12_4_ = 0xffffff82;
          auVar937._16_4_ = 0xffffff82;
          auVar937._20_4_ = 0xffffff82;
          auVar937._24_4_ = 0xffffff82;
          auVar937._28_4_ = 0xffffff82;
          auVar996._8_4_ = 0x3f3504f3;
          auVar996._0_8_ = 0x3f3504f33f3504f3;
          auVar996._12_4_ = 0x3f3504f3;
          auVar996._16_4_ = 0x3f3504f3;
          auVar996._20_4_ = 0x3f3504f3;
          auVar996._24_4_ = 0x3f3504f3;
          auVar996._28_4_ = 0x3f3504f3;
          auVar1051._8_4_ = 0xbf800000;
          auVar1051._0_8_ = 0xbf800000bf800000;
          auVar1051._12_4_ = 0xbf800000;
          auVar1051._16_4_ = 0xbf800000;
          auVar1051._20_4_ = 0xbf800000;
          auVar1051._24_4_ = 0xbf800000;
          auVar1051._28_4_ = 0xbf800000;
          auVar1105._8_4_ = 0x3f800000;
          auVar1105._0_8_ = 0x3f8000003f800000;
          auVar1105._12_4_ = 0x3f800000;
          auVar1105._16_4_ = 0x3f800000;
          auVar1105._20_4_ = 0x3f800000;
          auVar1105._24_4_ = 0x3f800000;
          auVar1105._28_4_ = 0x3f800000;
          auVar785._8_4_ = 0x3d9021bb;
          auVar785._0_8_ = 0x3d9021bb3d9021bb;
          auVar785._12_4_ = 0x3d9021bb;
          auVar785._16_4_ = 0x3d9021bb;
          auVar785._20_4_ = 0x3d9021bb;
          auVar785._24_4_ = 0x3d9021bb;
          auVar785._28_4_ = 0x3d9021bb;
          auVar1204._8_4_ = 0xbdebd1b8;
          auVar1204._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1204._12_4_ = 0xbdebd1b8;
          auVar1204._16_4_ = 0xbdebd1b8;
          auVar1204._20_4_ = 0xbdebd1b8;
          auVar1204._24_4_ = 0xbdebd1b8;
          auVar1204._28_4_ = 0xbdebd1b8;
          auVar1255._8_4_ = 0x3def251a;
          auVar1255._0_8_ = 0x3def251a3def251a;
          auVar1255._12_4_ = 0x3def251a;
          auVar1255._16_4_ = 0x3def251a;
          auVar1255._20_4_ = 0x3def251a;
          auVar1255._24_4_ = 0x3def251a;
          auVar1255._28_4_ = 0x3def251a;
          auVar1303._8_4_ = 0xbdfe5d4f;
          auVar1303._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1303._12_4_ = 0xbdfe5d4f;
          auVar1303._16_4_ = 0xbdfe5d4f;
          auVar1303._20_4_ = 0xbdfe5d4f;
          auVar1303._24_4_ = 0xbdfe5d4f;
          auVar1303._28_4_ = 0xbdfe5d4f;
          auVar1357._8_4_ = 0x3e11e9bf;
          auVar1357._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1357._12_4_ = 0x3e11e9bf;
          auVar1357._16_4_ = 0x3e11e9bf;
          auVar1357._20_4_ = 0x3e11e9bf;
          auVar1357._24_4_ = 0x3e11e9bf;
          auVar1357._28_4_ = 0x3e11e9bf;
          auVar1411._8_4_ = 0xbe2aae50;
          auVar1411._0_8_ = 0xbe2aae50be2aae50;
          auVar1411._12_4_ = 0xbe2aae50;
          auVar1411._16_4_ = 0xbe2aae50;
          auVar1411._20_4_ = 0xbe2aae50;
          auVar1411._24_4_ = 0xbe2aae50;
          auVar1411._28_4_ = 0xbe2aae50;
          auVar1465._8_4_ = 0x3e4cceac;
          auVar1465._0_8_ = 0x3e4cceac3e4cceac;
          auVar1465._12_4_ = 0x3e4cceac;
          auVar1465._16_4_ = 0x3e4cceac;
          auVar1465._20_4_ = 0x3e4cceac;
          auVar1465._24_4_ = 0x3e4cceac;
          auVar1465._28_4_ = 0x3e4cceac;
          auVar1518._8_4_ = 0xbe7ffffc;
          auVar1518._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1518._12_4_ = 0xbe7ffffc;
          auVar1518._16_4_ = 0xbe7ffffc;
          auVar1518._20_4_ = 0xbe7ffffc;
          auVar1518._24_4_ = 0xbe7ffffc;
          auVar1518._28_4_ = 0xbe7ffffc;
          auVar1571._8_4_ = 0x3eaaaaaa;
          auVar1571._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar1571._12_4_ = 0x3eaaaaaa;
          auVar1571._16_4_ = 0x3eaaaaaa;
          auVar1571._20_4_ = 0x3eaaaaaa;
          auVar1571._24_4_ = 0x3eaaaaaa;
          auVar1571._28_4_ = 0x3eaaaaaa;
          auVar495 = vpbroadcastd_avx512vl(ZEXT416(0xb95e8083));
          auVar444 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
          auVar558 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar287 = afVar255._0_16_;
          auVar350 = vxorps_avx512vl(auVar287,auVar287);
          auVar411 = vpcmpeqd_avx2(auVar1594._0_32_,auVar1594._0_32_);
          auVar498 = vpbroadcastd_avx512vl(ZEXT416(0x42b0c0a5));
          auVar499 = vpbroadcastd_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar502 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar503 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar287 = auVar422._0_16_;
          auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          in_ZMM29 = ZEXT3264(auVar423);
          for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
            auVar424 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            uVar279 = vcmpps_avx512vl(auVar424,ZEXT1632(auVar350),2);
            auVar135._8_4_ = 0x800000;
            auVar135._0_8_ = 0x80000000800000;
            auVar135._12_4_ = 0x800000;
            auVar135._16_4_ = 0x800000;
            auVar135._20_4_ = 0x800000;
            auVar135._24_4_ = 0x800000;
            auVar135._28_4_ = 0x800000;
            auVar424 = vmaxps_avx512vl(auVar424,auVar135);
            auVar425 = vpsrld_avx512vl(auVar424,0x17);
            auVar856._8_4_ = 0x807fffff;
            auVar856._0_8_ = 0x807fffff807fffff;
            auVar856._12_4_ = 0x807fffff;
            auVar856._16_4_ = 0x807fffff;
            auVar856._20_4_ = 0x807fffff;
            auVar856._24_4_ = 0x807fffff;
            auVar856._28_4_ = 0x807fffff;
            auVar136._8_4_ = 0x3f000000;
            auVar136._0_8_ = 0x3f0000003f000000;
            auVar136._12_4_ = 0x3f000000;
            auVar136._16_4_ = 0x3f000000;
            auVar136._20_4_ = 0x3f000000;
            auVar136._24_4_ = 0x3f000000;
            auVar136._28_4_ = 0x3f000000;
            auVar424 = vpternlogd_avx512vl(auVar424,auVar856,auVar136,0xea);
            uVar283 = vcmpps_avx512vl(auVar424,auVar996,1);
            auVar418 = vaddps_avx512vl(auVar424,auVar1051);
            auVar424 = vaddps_avx512vl(auVar418,auVar424);
            bVar281 = (bool)((byte)uVar283 & 1);
            auVar460._0_4_ = (uint)bVar281 * auVar424._0_4_ | (uint)!bVar281 * auVar418._0_4_;
            bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
            auVar460._4_4_ = (uint)bVar281 * auVar424._4_4_ | (uint)!bVar281 * auVar418._4_4_;
            bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
            auVar460._8_4_ = (uint)bVar281 * auVar424._8_4_ | (uint)!bVar281 * auVar418._8_4_;
            bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
            auVar460._12_4_ = (uint)bVar281 * auVar424._12_4_ | (uint)!bVar281 * auVar418._12_4_;
            bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
            auVar460._16_4_ = (uint)bVar281 * auVar424._16_4_ | (uint)!bVar281 * auVar418._16_4_;
            bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
            auVar460._20_4_ = (uint)bVar281 * auVar424._20_4_ | (uint)!bVar281 * auVar418._20_4_;
            bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
            auVar460._24_4_ = (uint)bVar281 * auVar424._24_4_ | (uint)!bVar281 * auVar418._24_4_;
            bVar281 = SUB81(uVar283 >> 7,0);
            auVar460._28_4_ = (uint)bVar281 * auVar424._28_4_ | (uint)!bVar281 * auVar418._28_4_;
            auVar418 = vmulps_avx512vl(auVar460,auVar460);
            auVar424 = vfmadd213ps_avx512vl(auVar785,auVar460,auVar1204);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar460,auVar1255);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar460,auVar1303);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar460,auVar1357);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar460,auVar1411);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar460,auVar1465);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar460,auVar1518);
            auVar424 = vfmadd213ps_avx512vl(auVar424,auVar460,auVar1571);
            auVar427 = vmulps_avx512vl(auVar418,auVar460);
            auVar195._4_4_ = auVar427._4_4_ * auVar424._4_4_;
            auVar195._0_4_ = auVar427._0_4_ * auVar424._0_4_;
            auVar195._8_4_ = auVar427._8_4_ * auVar424._8_4_;
            auVar195._12_4_ = auVar427._12_4_ * auVar424._12_4_;
            auVar195._16_4_ = auVar427._16_4_ * auVar424._16_4_;
            auVar195._20_4_ = auVar427._20_4_ * auVar424._20_4_;
            auVar195._24_4_ = auVar427._24_4_ * auVar424._24_4_;
            auVar195._28_4_ = auVar427._28_4_;
            auVar424 = vpaddd_avx512vl(auVar425,auVar937);
            auVar424 = vcvtdq2ps_avx(auVar424);
            auVar425 = vsubps_avx512vl(auVar424,auVar1105);
            bVar281 = (bool)((byte)uVar283 & 1);
            auVar461._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar424._0_4_;
            bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
            auVar461._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar424._4_4_;
            bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
            auVar461._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar424._8_4_;
            bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
            auVar461._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar424._12_4_;
            bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
            auVar461._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar424._16_4_;
            bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
            auVar461._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar424._20_4_;
            bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
            auVar461._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar424._24_4_;
            bVar281 = SUB81(uVar283 >> 7,0);
            auVar461._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar424._28_4_;
            auVar424 = vfmadd231ps_avx512vl(auVar195,auVar461,auVar495);
            auVar424 = vfmsub231ps_avx512vl(auVar424,auVar444,auVar418);
            auVar424 = vsubps_avx512vl(auVar424,auVar460);
            auVar424 = vfmsub231ps_avx512vl(auVar424,auVar558,auVar461);
            bVar281 = (bool)((byte)uVar279 & 1);
            bVar12 = (bool)((byte)(uVar279 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar279 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar279 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar279 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar279 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar279 >> 6) & 1);
            bVar18 = SUB81(uVar279 >> 7,0);
            auVar196._4_4_ =
                 (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar424._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar196._0_4_ =
                 (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar424._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr;
            auVar196._8_4_ =
                 (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar424._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar196._12_4_ =
                 (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar424._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar196._16_4_ =
                 (float)((uint)bVar15 * auVar411._16_4_ | (uint)!bVar15 * auVar424._16_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            auVar196._20_4_ =
                 (float)((uint)bVar16 * auVar411._20_4_ | (uint)!bVar16 * auVar424._20_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            auVar196._24_4_ =
                 (float)((uint)bVar17 * auVar411._24_4_ | (uint)!bVar17 * auVar424._24_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            auVar196._28_4_ = (uint)bVar18 * auVar411._28_4_ | (uint)!bVar18 * auVar424._28_4_;
            auVar424 = vminps_avx512vl(auVar196,auVar498);
            auVar424 = vmaxps_avx512vl(auVar424,auVar499);
            auVar425 = vfmadd231ps_avx512vl(auVar444,auVar424,auVar502);
            auVar418 = vrndscaleps_avx512vl(auVar425,1);
            uVar279 = vcmpps_avx512vl(auVar425,auVar418,1);
            auVar427 = vsubps_avx512vl(auVar418,auVar1105);
            bVar281 = (bool)((byte)uVar279 & 1);
            auVar462._0_4_ = (uint)bVar281 * auVar427._0_4_ | (uint)!bVar281 * auVar418._0_4_;
            bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
            auVar462._4_4_ = (uint)bVar281 * auVar427._4_4_ | (uint)!bVar281 * auVar418._4_4_;
            bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
            auVar462._8_4_ = (uint)bVar281 * auVar427._8_4_ | (uint)!bVar281 * auVar418._8_4_;
            bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
            auVar462._12_4_ = (uint)bVar281 * auVar427._12_4_ | (uint)!bVar281 * auVar418._12_4_;
            bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
            auVar462._16_4_ = (uint)bVar281 * auVar427._16_4_ | (uint)!bVar281 * auVar418._16_4_;
            bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
            auVar462._20_4_ = (uint)bVar281 * auVar427._20_4_ | (uint)!bVar281 * auVar418._20_4_;
            bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
            auVar462._24_4_ = (uint)bVar281 * auVar427._24_4_ | (uint)!bVar281 * auVar418._24_4_;
            bVar281 = SUB81(uVar279 >> 7,0);
            auVar462._28_4_ = (uint)bVar281 * auVar427._28_4_ | (uint)!bVar281 * auVar418._28_4_;
            auVar424 = vfmsub231ps_avx512vl(auVar424,auVar462,auVar558);
            auVar424 = vfnmsub231ps_avx512vl(auVar424,auVar462,auVar495);
            auVar197._4_4_ = auVar424._4_4_ * auVar424._4_4_;
            auVar197._0_4_ = auVar424._0_4_ * auVar424._0_4_;
            auVar197._8_4_ = auVar424._8_4_ * auVar424._8_4_;
            auVar197._12_4_ = auVar424._12_4_ * auVar424._12_4_;
            auVar197._16_4_ = auVar424._16_4_ * auVar424._16_4_;
            auVar197._20_4_ = auVar424._20_4_ * auVar424._20_4_;
            auVar197._24_4_ = auVar424._24_4_ * auVar424._24_4_;
            auVar197._28_4_ = auVar425._28_4_;
            auVar425 = vfmadd213ps_avx512vl(auVar503,auVar424,auVar504);
            auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar420);
            auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar421);
            auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar422);
            auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar444);
            auVar424 = vfmadd213ps_avx512vl(auVar425,auVar197,auVar424);
            auVar425 = vcvttps2dq_avx512vl(auVar462);
            auVar425 = vpslld_avx2(auVar425,0x17);
            auVar425 = vpaddd_avx512vl(auVar425,auVar423);
            auVar424 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar425);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar424;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          }
        }
        afVar270 = _ps512_cephes_log_p8;
        afVar269 = _ps512_cephes_log_p7;
        afVar268 = _ps512_cephes_log_p6;
        afVar267 = _ps512_cephes_log_p5;
        afVar266 = _ps512_cephes_log_p4;
        afVar265 = _ps512_cephes_log_p3;
        afVar263 = _ps512_cephes_log_p2;
        afVar262 = _ps512_cephes_log_p1;
        afVar261 = ::_ps512_cephes_exp_p4;
        afVar260 = ::_ps512_cephes_exp_p3;
        afVar259 = ::_ps512_cephes_exp_p2;
        afVar258 = ::_ps512_cephes_exp_p1;
        afVar257 = ::_ps512_cephes_exp_p0;
        afVar256 = ::_ps512_cephes_LOG2EF;
        afVar255 = ::_ps512_exp_lo;
        afVar254 = ::_ps512_exp_hi;
        if (iVar276 != 4) {
          return;
        }
        auVar1594 = vmovdqa64_avx512f((undefined1  [64])::_ps512_1);
        auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar632 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar573 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar650 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar574 = vpxord_avx512f(auVar1595,auVar573);
        auVar575 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar576 = vpxord_avx512f(auVar575,auVar573);
        auVar573 = vpxord_avx512f(auVar650,auVar573);
        uVar279 = 0;
        auVar287 = vxorps_avx512vl(auVar287,auVar287);
        auVar577 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
        for (; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
          auVar350 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279 + 3]));
          auVar351 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279 + 2]));
          fVar666 = ptr1[uVar279 + 1];
          auVar735._4_4_ = fVar666;
          auVar735._0_4_ = fVar666;
          auVar735._8_4_ = fVar666;
          auVar735._12_4_ = fVar666;
          auVar411 = vinsertf32x4_avx512vl(ZEXT1632(auVar351),auVar350,1);
          auVar350 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279]));
          auVar495 = vinsertf32x4_avx512vl(ZEXT1632(auVar350),auVar735,1);
          auVar578 = vinsertf64x4_avx512f(ZEXT3264(auVar495),auVar411,1);
          auVar579 = vmaxps_avx512f(auVar578,(undefined1  [64])_ps512_min_norm_pos);
          auVar580 = vpsrld_avx512f(auVar579,0x17);
          auVar579 = vpternlogd_avx512f(auVar579,auVar1595,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          uVar283 = vcmpps_avx512f(auVar579,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar582 = vsubps_avx512f(auVar579,auVar1594);
          auVar579 = vaddps_avx512f(auVar582,auVar579);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar612._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar582._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar612._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar582._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar612._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar582._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar612._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar582._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar612._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar582._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar612._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar582._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar612._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar582._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar612._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar582._28_4_;
          bVar11 = (byte)(uVar283 >> 8);
          bVar281 = (bool)(bVar11 & 1);
          auVar612._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar582._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar612._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar582._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar612._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar582._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar612._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar582._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar612._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar582._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar612._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar582._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar612._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar582._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar612._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar582._60_4_;
          auVar579 = vmulps_avx512f(auVar612,auVar612);
          auVar582 = vfmadd132ps_avx512f(auVar612,(undefined1  [64])afVar262,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar612,(undefined1  [64])afVar263);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar612,(undefined1  [64])afVar265);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar612,(undefined1  [64])afVar266);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar612,(undefined1  [64])afVar267);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar612,(undefined1  [64])afVar268);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar612,(undefined1  [64])afVar269);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar612,(undefined1  [64])afVar270);
          auVar581 = vmulps_avx512f(auVar579,auVar612);
          auVar582 = vfmadd213ps_avx512f(auVar581,auVar582,auVar612);
          uVar282 = vcmpps_avx512f(auVar578,ZEXT1664(auVar287),2);
          auVar578 = vpsubd_avx512f(auVar580,auVar632);
          auVar578 = vcvtdq2ps_avx512f(auVar578);
          auVar580 = vaddps_avx512f(auVar578,auVar1594);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar613._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar580._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar613._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar580._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar613._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar580._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar613._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar580._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar613._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar580._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar613._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar580._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar613._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar580._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar613._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar580._28_4_;
          bVar281 = (bool)(bVar11 & 1);
          auVar613._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar580._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar613._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar580._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar613._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar580._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar613._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar580._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar613._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar580._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar613._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar580._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar613._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar580._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar613._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar580._60_4_;
          auVar578 = vfmadd231ps_avx512f(auVar582,auVar613,auVar650);
          auVar578 = vfmadd231ps_avx512f(auVar578,auVar574,auVar579);
          auVar578 = vfmadd231ps_avx512f(auVar578,auVar575,auVar613);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar614._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar578._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar614._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar578._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar614._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar578._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar614._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar578._12_4_;
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar614._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar578._16_4_;
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar614._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar578._20_4_;
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar614._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar578._24_4_;
          bVar281 = (bool)((byte)(uVar282 >> 7) & 1);
          auVar614._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar578._28_4_;
          bVar281 = (bool)((byte)(uVar282 >> 8) & 1);
          auVar614._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar578._32_4_;
          bVar281 = (bool)((byte)(uVar282 >> 9) & 1);
          auVar614._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar578._36_4_;
          bVar281 = (bool)((byte)(uVar282 >> 10) & 1);
          auVar614._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar578._40_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xb) & 1);
          auVar614._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar578._44_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xc) & 1);
          auVar614._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar578._48_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xd) & 1);
          auVar614._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar578._52_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xe) & 1);
          auVar614._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar578._56_4_;
          bVar281 = SUB81(uVar282 >> 0xf,0);
          auVar614._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar578._60_4_;
          auVar578 = vmulps_avx512f(auVar614,*(undefined1 (*) [64])ptr);
          auVar578 = vminps_avx512f(auVar578,(undefined1  [64])afVar254);
          auVar578 = vmaxps_avx512f(auVar578,(undefined1  [64])afVar255);
          auVar579 = vfmadd213ps_avx512f((undefined1  [64])afVar256,auVar578,auVar1595);
          auVar580 = vrndscaleps_avx512f(auVar579,1);
          uVar283 = vcmpps_avx512f(auVar579,auVar580,1);
          auVar579 = vsubps_avx512f(auVar580,auVar1594);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar615._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar580._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar615._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar580._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar615._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar580._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar615._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar580._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar615._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar580._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar615._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar580._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar615._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar580._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar615._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar580._28_4_;
          bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
          auVar615._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar580._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar615._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar580._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar615._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar580._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar615._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar580._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar615._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar580._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar615._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar580._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar615._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar580._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar615._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar580._60_4_;
          auVar578 = vfmadd231ps_avx512f(auVar578,auVar615,auVar576);
          auVar578 = vfmadd231ps_avx512f(auVar578,auVar615,auVar573);
          auVar579 = vmulps_avx512f(auVar578,auVar578);
          auVar580 = vfmadd213ps_avx512f(auVar578,(undefined1  [64])afVar257,
                                         (undefined1  [64])afVar258);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar259);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar260);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar261);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,auVar1595);
          auVar578 = vfmadd213ps_avx512f(auVar580,auVar579,auVar578);
          auVar578 = vaddps_avx512f(auVar578,auVar1594);
          auVar579 = vcvttps2dq_avx512f(auVar615);
          auVar579 = vpaddd_avx512f(auVar579,auVar632);
          auVar579 = vpslld_avx512f(auVar579,0x17);
          auVar578 = vmulps_avx512f(auVar578,auVar579);
          *(undefined1 (*) [64])outptr = auVar578;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        auVar938._8_4_ = 0xffffff82;
        auVar938._0_8_ = 0xffffff82ffffff82;
        auVar938._12_4_ = 0xffffff82;
        auVar938._16_4_ = 0xffffff82;
        auVar938._20_4_ = 0xffffff82;
        auVar938._24_4_ = 0xffffff82;
        auVar938._28_4_ = 0xffffff82;
        auVar997._8_4_ = 0x3f3504f3;
        auVar997._0_8_ = 0x3f3504f33f3504f3;
        auVar997._12_4_ = 0x3f3504f3;
        auVar997._16_4_ = 0x3f3504f3;
        auVar997._20_4_ = 0x3f3504f3;
        auVar997._24_4_ = 0x3f3504f3;
        auVar997._28_4_ = 0x3f3504f3;
        auVar1052._8_4_ = 0xbf800000;
        auVar1052._0_8_ = 0xbf800000bf800000;
        auVar1052._12_4_ = 0xbf800000;
        auVar1052._16_4_ = 0xbf800000;
        auVar1052._20_4_ = 0xbf800000;
        auVar1052._24_4_ = 0xbf800000;
        auVar1052._28_4_ = 0xbf800000;
        auVar1106._8_4_ = 0x3f800000;
        auVar1106._0_8_ = 0x3f8000003f800000;
        auVar1106._12_4_ = 0x3f800000;
        auVar1106._16_4_ = 0x3f800000;
        auVar1106._20_4_ = 0x3f800000;
        auVar1106._24_4_ = 0x3f800000;
        auVar1106._28_4_ = 0x3f800000;
        auVar786._8_4_ = 0x3d9021bb;
        auVar786._0_8_ = 0x3d9021bb3d9021bb;
        auVar786._12_4_ = 0x3d9021bb;
        auVar786._16_4_ = 0x3d9021bb;
        auVar786._20_4_ = 0x3d9021bb;
        auVar786._24_4_ = 0x3d9021bb;
        auVar786._28_4_ = 0x3d9021bb;
        auVar1205._8_4_ = 0xbdebd1b8;
        auVar1205._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1205._12_4_ = 0xbdebd1b8;
        auVar1205._16_4_ = 0xbdebd1b8;
        auVar1205._20_4_ = 0xbdebd1b8;
        auVar1205._24_4_ = 0xbdebd1b8;
        auVar1205._28_4_ = 0xbdebd1b8;
        auVar1256._8_4_ = 0x3def251a;
        auVar1256._0_8_ = 0x3def251a3def251a;
        auVar1256._12_4_ = 0x3def251a;
        auVar1256._16_4_ = 0x3def251a;
        auVar1256._20_4_ = 0x3def251a;
        auVar1256._24_4_ = 0x3def251a;
        auVar1256._28_4_ = 0x3def251a;
        auVar1304._8_4_ = 0xbdfe5d4f;
        auVar1304._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1304._12_4_ = 0xbdfe5d4f;
        auVar1304._16_4_ = 0xbdfe5d4f;
        auVar1304._20_4_ = 0xbdfe5d4f;
        auVar1304._24_4_ = 0xbdfe5d4f;
        auVar1304._28_4_ = 0xbdfe5d4f;
        auVar1358._8_4_ = 0x3e11e9bf;
        auVar1358._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1358._12_4_ = 0x3e11e9bf;
        auVar1358._16_4_ = 0x3e11e9bf;
        auVar1358._20_4_ = 0x3e11e9bf;
        auVar1358._24_4_ = 0x3e11e9bf;
        auVar1358._28_4_ = 0x3e11e9bf;
        auVar1412._8_4_ = 0xbe2aae50;
        auVar1412._0_8_ = 0xbe2aae50be2aae50;
        auVar1412._12_4_ = 0xbe2aae50;
        auVar1412._16_4_ = 0xbe2aae50;
        auVar1412._20_4_ = 0xbe2aae50;
        auVar1412._24_4_ = 0xbe2aae50;
        auVar1412._28_4_ = 0xbe2aae50;
        auVar1466._8_4_ = 0x3e4cceac;
        auVar1466._0_8_ = 0x3e4cceac3e4cceac;
        auVar1466._12_4_ = 0x3e4cceac;
        auVar1466._16_4_ = 0x3e4cceac;
        auVar1466._20_4_ = 0x3e4cceac;
        auVar1466._24_4_ = 0x3e4cceac;
        auVar1466._28_4_ = 0x3e4cceac;
        auVar1519._8_4_ = 0xbe7ffffc;
        auVar1519._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1519._12_4_ = 0xbe7ffffc;
        auVar1519._16_4_ = 0xbe7ffffc;
        auVar1519._20_4_ = 0xbe7ffffc;
        auVar1519._24_4_ = 0xbe7ffffc;
        auVar1519._28_4_ = 0xbe7ffffc;
        auVar1572._8_4_ = 0x3eaaaaaa;
        auVar1572._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar1572._12_4_ = 0x3eaaaaaa;
        auVar1572._16_4_ = 0x3eaaaaaa;
        auVar1572._20_4_ = 0x3eaaaaaa;
        auVar1572._24_4_ = 0x3eaaaaaa;
        auVar1572._28_4_ = 0x3eaaaaaa;
        auVar495 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar558 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar287 = afVar255._0_16_;
        auVar287 = vxorps_avx512vl(auVar287,auVar287);
        auVar411 = vpcmpeqd_avx2(auVar1594._0_32_,auVar1594._0_32_);
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar499 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar502 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar503 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar423 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
          auVar350 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279 + 1]));
          auVar351 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279]));
          auVar424 = vinsertf32x4_avx512vl(ZEXT1632(auVar351),auVar350,1);
          uVar283 = vcmpps_avx512vl(auVar424,ZEXT1632(auVar287),2);
          auVar137._8_4_ = 0x800000;
          auVar137._0_8_ = 0x80000000800000;
          auVar137._12_4_ = 0x800000;
          auVar137._16_4_ = 0x800000;
          auVar137._20_4_ = 0x800000;
          auVar137._24_4_ = 0x800000;
          auVar137._28_4_ = 0x800000;
          auVar424 = vmaxps_avx512vl(auVar424,auVar137);
          auVar425 = vpsrld_avx512vl(auVar424,0x17);
          auVar857._8_4_ = 0x807fffff;
          auVar857._0_8_ = 0x807fffff807fffff;
          auVar857._12_4_ = 0x807fffff;
          auVar857._16_4_ = 0x807fffff;
          auVar857._20_4_ = 0x807fffff;
          auVar857._24_4_ = 0x807fffff;
          auVar857._28_4_ = 0x807fffff;
          auVar138._8_4_ = 0x3f000000;
          auVar138._0_8_ = 0x3f0000003f000000;
          auVar138._12_4_ = 0x3f000000;
          auVar138._16_4_ = 0x3f000000;
          auVar138._20_4_ = 0x3f000000;
          auVar138._24_4_ = 0x3f000000;
          auVar138._28_4_ = 0x3f000000;
          auVar424 = vpternlogd_avx512vl(auVar424,auVar857,auVar138,0xea);
          uVar282 = vcmpps_avx512vl(auVar424,auVar997,1);
          auVar418 = vaddps_avx512vl(auVar424,auVar1052);
          auVar424 = vaddps_avx512vl(auVar418,auVar424);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar463._0_4_ = (uint)bVar281 * auVar424._0_4_ | (uint)!bVar281 * auVar418._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar463._4_4_ = (uint)bVar281 * auVar424._4_4_ | (uint)!bVar281 * auVar418._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar463._8_4_ = (uint)bVar281 * auVar424._8_4_ | (uint)!bVar281 * auVar418._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar463._12_4_ = (uint)bVar281 * auVar424._12_4_ | (uint)!bVar281 * auVar418._12_4_;
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar463._16_4_ = (uint)bVar281 * auVar424._16_4_ | (uint)!bVar281 * auVar418._16_4_;
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar463._20_4_ = (uint)bVar281 * auVar424._20_4_ | (uint)!bVar281 * auVar418._20_4_;
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar463._24_4_ = (uint)bVar281 * auVar424._24_4_ | (uint)!bVar281 * auVar418._24_4_;
          bVar281 = SUB81(uVar282 >> 7,0);
          auVar463._28_4_ = (uint)bVar281 * auVar424._28_4_ | (uint)!bVar281 * auVar418._28_4_;
          auVar418 = vmulps_avx512vl(auVar463,auVar463);
          auVar424 = vfmadd213ps_avx512vl(auVar786,auVar463,auVar1205);
          auVar424 = vfmadd213ps_avx512vl(auVar424,auVar463,auVar1256);
          auVar424 = vfmadd213ps_avx512vl(auVar424,auVar463,auVar1304);
          auVar424 = vfmadd213ps_avx512vl(auVar424,auVar463,auVar1358);
          auVar424 = vfmadd213ps_avx512vl(auVar424,auVar463,auVar1412);
          auVar424 = vfmadd213ps_avx512vl(auVar424,auVar463,auVar1466);
          auVar424 = vfmadd213ps_avx512vl(auVar424,auVar463,auVar1519);
          auVar424 = vfmadd213ps_avx512vl(auVar424,auVar463,auVar1572);
          auVar427 = vmulps_avx512vl(auVar418,auVar463);
          auVar198._4_4_ = auVar427._4_4_ * auVar424._4_4_;
          auVar198._0_4_ = auVar427._0_4_ * auVar424._0_4_;
          auVar198._8_4_ = auVar427._8_4_ * auVar424._8_4_;
          auVar198._12_4_ = auVar427._12_4_ * auVar424._12_4_;
          auVar198._16_4_ = auVar427._16_4_ * auVar424._16_4_;
          auVar198._20_4_ = auVar427._20_4_ * auVar424._20_4_;
          auVar198._24_4_ = auVar427._24_4_ * auVar424._24_4_;
          auVar198._28_4_ = auVar427._28_4_;
          auVar424 = vpaddd_avx512vl(auVar425,auVar938);
          auVar424 = vcvtdq2ps_avx(auVar424);
          auVar425 = vsubps_avx512vl(auVar424,auVar1106);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar464._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar424._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar464._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar424._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar464._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar424._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar464._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar424._12_4_;
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar464._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar424._16_4_;
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar464._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar424._20_4_;
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar464._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar424._24_4_;
          bVar281 = SUB81(uVar282 >> 7,0);
          auVar464._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar424._28_4_;
          auVar424 = vfmadd231ps_avx512vl(auVar198,auVar464,auVar495);
          auVar424 = vfmsub231ps_avx512vl(auVar424,auVar444,auVar418);
          auVar424 = vsubps_avx512vl(auVar424,auVar463);
          auVar424 = vfmsub231ps_avx512vl(auVar424,auVar558,auVar464);
          bVar281 = (bool)((byte)uVar283 & 1);
          bVar12 = (bool)((byte)(uVar283 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar283 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar283 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar283 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar283 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar283 >> 6) & 1);
          bVar18 = SUB81(uVar283 >> 7,0);
          auVar199._4_4_ =
               (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar424._4_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar199._0_4_ =
               (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar424._0_4_) *
               *(float *)*(undefined1 (*) [64])ptr;
          auVar199._8_4_ =
               (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar424._8_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar199._12_4_ =
               (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar424._12_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar199._16_4_ =
               (float)((uint)bVar15 * auVar411._16_4_ | (uint)!bVar15 * auVar424._16_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          auVar199._20_4_ =
               (float)((uint)bVar16 * auVar411._20_4_ | (uint)!bVar16 * auVar424._20_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          auVar199._24_4_ =
               (float)((uint)bVar17 * auVar411._24_4_ | (uint)!bVar17 * auVar424._24_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          auVar199._28_4_ = (uint)bVar18 * auVar411._28_4_ | (uint)!bVar18 * auVar424._28_4_;
          auVar424 = vminps_avx512vl(auVar199,auVar498);
          auVar424 = vmaxps_avx512vl(auVar424,auVar499);
          auVar425 = vfmadd231ps_avx512vl(auVar444,auVar424,auVar502);
          auVar418 = vrndscaleps_avx512vl(auVar425,1);
          uVar283 = vcmpps_avx512vl(auVar425,auVar418,1);
          auVar427 = vsubps_avx512vl(auVar418,auVar1106);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar465._0_4_ = (uint)bVar281 * auVar427._0_4_ | (uint)!bVar281 * auVar418._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar465._4_4_ = (uint)bVar281 * auVar427._4_4_ | (uint)!bVar281 * auVar418._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar465._8_4_ = (uint)bVar281 * auVar427._8_4_ | (uint)!bVar281 * auVar418._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar465._12_4_ = (uint)bVar281 * auVar427._12_4_ | (uint)!bVar281 * auVar418._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar465._16_4_ = (uint)bVar281 * auVar427._16_4_ | (uint)!bVar281 * auVar418._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar465._20_4_ = (uint)bVar281 * auVar427._20_4_ | (uint)!bVar281 * auVar418._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar465._24_4_ = (uint)bVar281 * auVar427._24_4_ | (uint)!bVar281 * auVar418._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar465._28_4_ = (uint)bVar281 * auVar427._28_4_ | (uint)!bVar281 * auVar418._28_4_;
          auVar424 = vfmsub231ps_avx512vl(auVar424,auVar465,auVar558);
          auVar424 = vfnmsub231ps_avx512vl(auVar424,auVar465,auVar495);
          auVar200._4_4_ = auVar424._4_4_ * auVar424._4_4_;
          auVar200._0_4_ = auVar424._0_4_ * auVar424._0_4_;
          auVar200._8_4_ = auVar424._8_4_ * auVar424._8_4_;
          auVar200._12_4_ = auVar424._12_4_ * auVar424._12_4_;
          auVar200._16_4_ = auVar424._16_4_ * auVar424._16_4_;
          auVar200._20_4_ = auVar424._20_4_ * auVar424._20_4_;
          auVar200._24_4_ = auVar424._24_4_ * auVar424._24_4_;
          auVar200._28_4_ = auVar425._28_4_;
          auVar425 = vfmadd213ps_avx512vl(auVar503,auVar424,auVar504);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar420);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar421);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar422);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar444);
          auVar424 = vfmadd213ps_avx512vl(auVar425,auVar200,auVar424);
          auVar425 = vcvttps2dq_avx512vl(auVar465);
          auVar425 = vpslld_avx2(auVar425,0x17);
          auVar425 = vpaddd_avx512vl(auVar425,auVar423);
          auVar424 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar425);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar424;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        lVar280 = 0;
        auVar916._8_4_ = 0x807fffff;
        auVar916._0_8_ = 0x807fffff807fffff;
        auVar916._12_4_ = 0x807fffff;
        auVar968._8_4_ = 0xffffff82;
        auVar968._0_8_ = 0xffffff82ffffff82;
        auVar968._12_4_ = 0xffffff82;
        auVar1026._8_4_ = 0x3f3504f3;
        auVar1026._0_8_ = 0x3f3504f33f3504f3;
        auVar1026._12_4_ = 0x3f3504f3;
        auVar1081._8_4_ = 0xbf800000;
        auVar1081._0_8_ = 0xbf800000bf800000;
        auVar1081._12_4_ = 0xbf800000;
        auVar1134._8_4_ = 0x3f800000;
        auVar1134._0_8_ = 0x3f8000003f800000;
        auVar1134._12_4_ = 0x3f800000;
        auVar736._8_4_ = 0x3d9021bb;
        auVar736._0_8_ = 0x3d9021bb3d9021bb;
        auVar736._12_4_ = 0x3d9021bb;
        auVar1231._8_4_ = 0xbdebd1b8;
        auVar1231._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1231._12_4_ = 0xbdebd1b8;
        auVar1279._8_4_ = 0x3def251a;
        auVar1279._0_8_ = 0x3def251a3def251a;
        auVar1279._12_4_ = 0x3def251a;
        auVar1333._8_4_ = 0xbdfe5d4f;
        auVar1333._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1333._12_4_ = 0xbdfe5d4f;
        auVar1387._8_4_ = 0x3e11e9bf;
        auVar1387._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1387._12_4_ = 0x3e11e9bf;
        auVar1441._8_4_ = 0xbe2aae50;
        auVar1441._0_8_ = 0xbe2aae50be2aae50;
        auVar1441._12_4_ = 0xbe2aae50;
        auVar1494._8_4_ = 0x3e4cceac;
        auVar1494._0_8_ = 0x3e4cceac3e4cceac;
        auVar1494._12_4_ = 0x3e4cceac;
        auVar1548._8_4_ = 0xbe7ffffc;
        auVar1548._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1548._12_4_ = 0xbe7ffffc;
        auVar350 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar351 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar355 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar356 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar359 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar395 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar396 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar296 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar287 = vpcmpeqd_avx(auVar411._0_16_,auVar411._0_16_);
        auVar299 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
            uVar283 = (ulong)((int)uVar283 + 1)) {
          auVar300 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + uVar279 * 4 + lVar280)));
          uVar282 = vcmpps_avx512vl(auVar300,_DAT_0054d070,2);
          auVar66._8_4_ = 0x800000;
          auVar66._0_8_ = 0x80000000800000;
          auVar66._12_4_ = 0x800000;
          auVar300 = vmaxps_avx512vl(auVar300,auVar66);
          auVar301 = vpsrld_avx512vl(auVar300,0x17);
          auVar67._8_4_ = 0x3f000000;
          auVar67._0_8_ = 0x3f0000003f000000;
          auVar67._12_4_ = 0x3f000000;
          auVar300 = vpternlogd_avx512vl(auVar300,auVar916,auVar67,0xea);
          uVar284 = vcmpps_avx512vl(auVar300,auVar1026,1);
          auVar294 = vaddps_avx512vl(auVar300,auVar1081);
          auVar300 = vaddps_avx512vl(auVar294,auVar300);
          bVar281 = (bool)((byte)uVar284 & 1);
          auVar329._0_4_ = (uint)bVar281 * auVar300._0_4_ | (uint)!bVar281 * auVar294._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar329._4_4_ = (uint)bVar281 * auVar300._4_4_ | (uint)!bVar281 * auVar294._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar329._8_4_ = (uint)bVar281 * auVar300._8_4_ | (uint)!bVar281 * auVar294._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar329._12_4_ = (uint)bVar281 * auVar300._12_4_ | (uint)!bVar281 * auVar294._12_4_;
          auVar294 = vmulps_avx512vl(auVar329,auVar329);
          auVar300 = vfmadd213ps_avx512vl(auVar736,auVar329,auVar1231);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar329,auVar1279);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar329,auVar1333);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar329,auVar1387);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar329,auVar1441);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar329,auVar1494);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar329,auVar1548);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar329,auVar350);
          auVar303 = vmulps_avx512vl(auVar294,auVar329);
          auVar822._0_4_ = auVar300._0_4_ * auVar303._0_4_;
          auVar822._4_4_ = auVar300._4_4_ * auVar303._4_4_;
          auVar822._8_4_ = auVar300._8_4_ * auVar303._8_4_;
          auVar822._12_4_ = auVar300._12_4_ * auVar303._12_4_;
          auVar300 = vpaddd_avx512vl(auVar301,auVar968);
          auVar300 = vcvtdq2ps_avx(auVar300);
          auVar301 = vsubps_avx512vl(auVar300,auVar1134);
          bVar281 = (bool)((byte)uVar284 & 1);
          auVar330._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar300._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar330._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar300._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar330._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar300._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar330._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar300._12_4_;
          auVar300 = vfmadd231ps_avx512vl(auVar822,auVar330,auVar351);
          auVar300 = vfmsub231ps_avx512vl(auVar300,auVar354,auVar294);
          auVar300 = vsubps_avx512vl(auVar300,auVar329);
          auVar300 = vfmsub231ps_avx512vl(auVar300,auVar355,auVar330);
          bVar281 = (bool)((byte)uVar282 & 1);
          bVar12 = (bool)((byte)(uVar282 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar282 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar282 >> 3) & 1);
          pfVar1599 = (float *)(*(undefined1 (*) [64])ptr + lVar280 * 4);
          auVar823._0_4_ =
               (float)((uint)bVar281 * auVar287._0_4_ | (uint)!bVar281 * auVar300._0_4_) *
               *pfVar1599;
          auVar823._4_4_ =
               (float)((uint)bVar12 * auVar287._4_4_ | (uint)!bVar12 * auVar300._4_4_) *
               pfVar1599[1];
          auVar823._8_4_ =
               (float)((uint)bVar13 * auVar287._8_4_ | (uint)!bVar13 * auVar300._8_4_) *
               pfVar1599[2];
          auVar823._12_4_ =
               (float)((uint)bVar14 * auVar287._12_4_ | (uint)!bVar14 * auVar300._12_4_) *
               pfVar1599[3];
          auVar300 = vminps_avx512vl(auVar823,auVar356);
          auVar300 = vmaxps_avx512vl(auVar300,auVar359);
          auVar301 = vfmadd231ps_avx512vl(auVar354,auVar300,auVar360);
          auVar294 = vcvttps2dq_avx512vl(auVar301);
          auVar294 = vcvtdq2ps_avx512vl(auVar294);
          uVar282 = vcmpps_avx512vl(auVar301,auVar294,1);
          auVar301 = vsubps_avx512vl(auVar294,auVar1134);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar331._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar294._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar331._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar294._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar331._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar294._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar331._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar294._12_4_;
          auVar300 = vfmsub231ps_avx512vl(auVar300,auVar331,auVar355);
          auVar300 = vfnmsub231ps_avx512vl(auVar300,auVar331,auVar351);
          auVar1181._0_4_ = auVar300._0_4_ * auVar300._0_4_;
          auVar1181._4_4_ = auVar300._4_4_ * auVar300._4_4_;
          auVar1181._8_4_ = auVar300._8_4_ * auVar300._8_4_;
          auVar1181._12_4_ = auVar300._12_4_ * auVar300._12_4_;
          auVar301 = vfmadd213ps_avx512vl(auVar395,auVar300,auVar396);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar296);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar297);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar298);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar354);
          auVar300 = vfmadd213ps_avx512vl(auVar301,auVar1181,auVar300);
          auVar301 = vcvttps2dq_avx512vl(auVar331);
          auVar301 = vpslld_avx(auVar301,0x17);
          auVar301 = vpaddd_avx512vl(auVar301,auVar299);
          auVar300 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar301);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar300;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (bw == 1) {
        auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar632 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar573 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar650 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar574 = vpxord_avx512f(auVar1595,auVar650);
        auVar575 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar576 = vpxord_avx512f(auVar575,auVar650);
        auVar650 = vpxord_avx512f(auVar573,auVar650);
        iVar278 = 0xf;
        auVar287 = vxorps_avx512vl(auVar351,auVar351);
        uVar279 = vcmpps_avx512f(auVar1594,ZEXT1664(auVar287),2);
        auVar1594 = vmaxps_avx512f(auVar1594,(undefined1  [64])_ps512_min_norm_pos);
        auVar577 = vmovdqa64_avx512f((undefined1  [64])_ps512_inv_mant_mask);
        auVar577 = vpternlogd_avx512f(auVar577,auVar1594,auVar1595,0xea);
        uVar283 = vcmpps_avx512f(auVar577,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar578 = vpternlogd_avx512f(in_ZMM27,in_ZMM27,in_ZMM27,0xff);
        for (; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
          auVar579 = vsubps_avx512f(auVar577,(undefined1  [64])afVar254);
          auVar580 = vaddps_avx512f(auVar579,auVar577);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar590._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar579._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar590._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar579._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar590._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar579._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar590._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar579._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar590._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar579._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar590._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar579._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar590._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar579._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar590._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar579._28_4_;
          bVar11 = (byte)(uVar283 >> 8);
          bVar281 = (bool)(bVar11 & 1);
          auVar590._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar579._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar590._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar579._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar590._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar579._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar590._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar579._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar590._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar579._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar590._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar579._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar590._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar579._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar590._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar579._60_4_;
          auVar579 = vmulps_avx512f(auVar590,auVar590);
          auVar580 = vfmadd213ps_avx512f(auVar590,(undefined1  [64])afVar265,
                                         (undefined1  [64])afVar266);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar590,(undefined1  [64])afVar267);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar590,(undefined1  [64])afVar268);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar590,(undefined1  [64])afVar269);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar590,(undefined1  [64])afVar270);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar590,(undefined1  [64])afVar271);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar590,(undefined1  [64])afVar272);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar590,(undefined1  [64])afVar273);
          auVar582 = vmulps_avx512f(auVar579,auVar590);
          auVar580 = vfmadd213ps_avx512f(auVar582,auVar580,auVar590);
          auVar582 = vpsrld_avx512f(auVar1594,0x17);
          auVar582 = vpsubd_avx512f(auVar582,auVar632);
          auVar582 = vcvtdq2ps_avx512f(auVar582);
          auVar581 = vaddps_avx512f(auVar582,(undefined1  [64])afVar254);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar591._0_4_ = (uint)bVar281 * auVar582._0_4_ | (uint)!bVar281 * auVar581._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar591._4_4_ = (uint)bVar281 * auVar582._4_4_ | (uint)!bVar281 * auVar581._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar591._8_4_ = (uint)bVar281 * auVar582._8_4_ | (uint)!bVar281 * auVar581._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar591._12_4_ = (uint)bVar281 * auVar582._12_4_ | (uint)!bVar281 * auVar581._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar591._16_4_ = (uint)bVar281 * auVar582._16_4_ | (uint)!bVar281 * auVar581._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar591._20_4_ = (uint)bVar281 * auVar582._20_4_ | (uint)!bVar281 * auVar581._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar591._24_4_ = (uint)bVar281 * auVar582._24_4_ | (uint)!bVar281 * auVar581._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar591._28_4_ = (uint)bVar281 * auVar582._28_4_ | (uint)!bVar281 * auVar581._28_4_;
          bVar281 = (bool)(bVar11 & 1);
          auVar591._32_4_ = (uint)bVar281 * auVar582._32_4_ | (uint)!bVar281 * auVar581._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar591._36_4_ = (uint)bVar281 * auVar582._36_4_ | (uint)!bVar281 * auVar581._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar591._40_4_ = (uint)bVar281 * auVar582._40_4_ | (uint)!bVar281 * auVar581._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar591._44_4_ = (uint)bVar281 * auVar582._44_4_ | (uint)!bVar281 * auVar581._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar591._48_4_ = (uint)bVar281 * auVar582._48_4_ | (uint)!bVar281 * auVar581._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar591._52_4_ = (uint)bVar281 * auVar582._52_4_ | (uint)!bVar281 * auVar581._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar591._56_4_ = (uint)bVar281 * auVar582._56_4_ | (uint)!bVar281 * auVar581._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar591._60_4_ = (uint)bVar281 * auVar582._60_4_ | (uint)!bVar281 * auVar581._60_4_;
          auVar580 = vfmadd231ps_avx512f(auVar580,auVar591,auVar573);
          auVar579 = vfmadd231ps_avx512f(auVar580,auVar574,auVar579);
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar575,auVar591);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar592._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar579._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar592._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar579._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar592._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar579._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar592._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar579._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar592._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar579._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar592._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar579._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar592._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar579._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar592._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar579._28_4_;
          bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
          auVar592._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar579._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar592._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar579._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar592._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar579._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar592._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar579._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar592._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar579._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar592._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar579._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar592._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar579._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar592._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar579._60_4_;
          auVar579 = vmulps_avx512f(auVar592,*(undefined1 (*) [64])ptr);
          auVar579 = vminps_avx512f(auVar579,(undefined1  [64])afVar255);
          auVar579 = vmaxps_avx512f(auVar579,(undefined1  [64])afVar256);
          auVar580 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar579,auVar1595);
          auVar582 = vrndscaleps_avx512f(auVar580,1);
          uVar282 = vcmpps_avx512f(auVar580,auVar582,1);
          auVar580 = vsubps_avx512f(auVar582,(undefined1  [64])afVar254);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar593._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar582._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar593._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar582._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar593._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar582._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar593._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar582._12_4_;
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar593._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar582._16_4_;
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar593._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar582._20_4_;
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar593._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar582._24_4_;
          bVar281 = (bool)((byte)(uVar282 >> 7) & 1);
          auVar593._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar582._28_4_;
          bVar281 = (bool)((byte)(uVar282 >> 8) & 1);
          auVar593._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar582._32_4_;
          bVar281 = (bool)((byte)(uVar282 >> 9) & 1);
          auVar593._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar582._36_4_;
          bVar281 = (bool)((byte)(uVar282 >> 10) & 1);
          auVar593._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar582._40_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xb) & 1);
          auVar593._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar582._44_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xc) & 1);
          auVar593._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar582._48_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xd) & 1);
          auVar593._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar582._52_4_;
          bVar281 = (bool)((byte)(uVar282 >> 0xe) & 1);
          auVar593._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar582._56_4_;
          bVar281 = SUB81(uVar282 >> 0xf,0);
          auVar593._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar582._60_4_;
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar593,auVar576);
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar593,auVar650);
          auVar580 = vmulps_avx512f(auVar579,auVar579);
          auVar582 = vfmadd213ps_avx512f(auVar579,(undefined1  [64])afVar258,
                                         (undefined1  [64])afVar259);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar260);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar261);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar262);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,auVar1595);
          auVar579 = vfmadd213ps_avx512f(auVar582,auVar580,auVar579);
          auVar579 = vaddps_avx512f(auVar579,(undefined1  [64])afVar254);
          auVar580 = vcvttps2dq_avx512f(auVar593);
          auVar580 = vpaddd_avx512f(auVar580,auVar632);
          auVar580 = vpslld_avx512f(auVar580,0x17);
          auVar579 = vmulps_avx512f(auVar579,auVar580);
          *(undefined1 (*) [64])outptr = auVar579;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        fVar666 = *ptr1;
        auVar705._4_4_ = fVar666;
        auVar705._0_4_ = fVar666;
        auVar705._8_4_ = fVar666;
        auVar705._12_4_ = fVar666;
        auVar705._16_4_ = fVar666;
        auVar705._20_4_ = fVar666;
        auVar705._24_4_ = fVar666;
        auVar705._28_4_ = fVar666;
        iVar278 = iVar278 + -0xc;
        auVar995._8_4_ = 0xffffff82;
        auVar995._0_8_ = 0xffffff82ffffff82;
        auVar995._12_4_ = 0xffffff82;
        auVar995._16_4_ = 0xffffff82;
        auVar995._20_4_ = 0xffffff82;
        auVar995._24_4_ = 0xffffff82;
        auVar995._28_4_ = 0xffffff82;
        auVar1050._8_4_ = 0x3f3504f3;
        auVar1050._0_8_ = 0x3f3504f33f3504f3;
        auVar1050._12_4_ = 0x3f3504f3;
        auVar1050._16_4_ = 0x3f3504f3;
        auVar1050._20_4_ = 0x3f3504f3;
        auVar1050._24_4_ = 0x3f3504f3;
        auVar1050._28_4_ = 0x3f3504f3;
        auVar1104._8_4_ = 0xbf800000;
        auVar1104._0_8_ = 0xbf800000bf800000;
        auVar1104._12_4_ = 0xbf800000;
        auVar1104._16_4_ = 0xbf800000;
        auVar1104._20_4_ = 0xbf800000;
        auVar1104._24_4_ = 0xbf800000;
        auVar1104._28_4_ = 0xbf800000;
        auVar1155._8_4_ = 0x3f800000;
        auVar1155._0_8_ = 0x3f8000003f800000;
        auVar1155._12_4_ = 0x3f800000;
        auVar1155._16_4_ = 0x3f800000;
        auVar1155._20_4_ = 0x3f800000;
        auVar1155._24_4_ = 0x3f800000;
        auVar1155._28_4_ = 0x3f800000;
        auVar855._8_4_ = 0x3d9021bb;
        auVar855._0_8_ = 0x3d9021bb3d9021bb;
        auVar855._12_4_ = 0x3d9021bb;
        auVar855._16_4_ = 0x3d9021bb;
        auVar855._20_4_ = 0x3d9021bb;
        auVar855._24_4_ = 0x3d9021bb;
        auVar855._28_4_ = 0x3d9021bb;
        auVar1254._8_4_ = 0xbdebd1b8;
        auVar1254._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1254._12_4_ = 0xbdebd1b8;
        auVar1254._16_4_ = 0xbdebd1b8;
        auVar1254._20_4_ = 0xbdebd1b8;
        auVar1254._24_4_ = 0xbdebd1b8;
        auVar1254._28_4_ = 0xbdebd1b8;
        auVar1302._8_4_ = 0x3def251a;
        auVar1302._0_8_ = 0x3def251a3def251a;
        auVar1302._12_4_ = 0x3def251a;
        auVar1302._16_4_ = 0x3def251a;
        auVar1302._20_4_ = 0x3def251a;
        auVar1302._24_4_ = 0x3def251a;
        auVar1302._28_4_ = 0x3def251a;
        auVar1356._8_4_ = 0xbdfe5d4f;
        auVar1356._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1356._12_4_ = 0xbdfe5d4f;
        auVar1356._16_4_ = 0xbdfe5d4f;
        auVar1356._20_4_ = 0xbdfe5d4f;
        auVar1356._24_4_ = 0xbdfe5d4f;
        auVar1356._28_4_ = 0xbdfe5d4f;
        auVar1410._8_4_ = 0x3e11e9bf;
        auVar1410._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1410._12_4_ = 0x3e11e9bf;
        auVar1410._16_4_ = 0x3e11e9bf;
        auVar1410._20_4_ = 0x3e11e9bf;
        auVar1410._24_4_ = 0x3e11e9bf;
        auVar1410._28_4_ = 0x3e11e9bf;
        auVar1464._8_4_ = 0xbe2aae50;
        auVar1464._0_8_ = 0xbe2aae50be2aae50;
        auVar1464._12_4_ = 0xbe2aae50;
        auVar1464._16_4_ = 0xbe2aae50;
        auVar1464._20_4_ = 0xbe2aae50;
        auVar1464._24_4_ = 0xbe2aae50;
        auVar1464._28_4_ = 0xbe2aae50;
        auVar1517._8_4_ = 0x3e4cceac;
        auVar1517._0_8_ = 0x3e4cceac3e4cceac;
        auVar1517._12_4_ = 0x3e4cceac;
        auVar1517._16_4_ = 0x3e4cceac;
        auVar1517._20_4_ = 0x3e4cceac;
        auVar1517._24_4_ = 0x3e4cceac;
        auVar1517._28_4_ = 0x3e4cceac;
        auVar1570._8_4_ = 0xbe7ffffc;
        auVar1570._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1570._12_4_ = 0xbe7ffffc;
        auVar1570._16_4_ = 0xbe7ffffc;
        auVar1570._20_4_ = 0xbe7ffffc;
        auVar1570._24_4_ = 0xbe7ffffc;
        auVar1570._28_4_ = 0xbe7ffffc;
        auVar495 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar444 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar558 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar411 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        uVar279 = vcmpps_avx512vl(auVar705,auVar411,2);
        auVar411 = vpcmpeqd_avx2(auVar411,auVar411);
        auVar499 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar502 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar503 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar424 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        for (; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
          auVar139._8_4_ = 0x800000;
          auVar139._0_8_ = 0x80000000800000;
          auVar139._12_4_ = 0x800000;
          auVar139._16_4_ = 0x800000;
          auVar139._20_4_ = 0x800000;
          auVar139._24_4_ = 0x800000;
          auVar139._28_4_ = 0x800000;
          auVar425 = vmaxps_avx512vl(auVar705,auVar139);
          auVar418 = vpsrld_avx512vl(auVar425,0x17);
          auVar936._8_4_ = 0x807fffff;
          auVar936._0_8_ = 0x807fffff807fffff;
          auVar936._12_4_ = 0x807fffff;
          auVar936._16_4_ = 0x807fffff;
          auVar936._20_4_ = 0x807fffff;
          auVar936._24_4_ = 0x807fffff;
          auVar936._28_4_ = 0x807fffff;
          auVar140._8_4_ = 0x3f000000;
          auVar140._0_8_ = 0x3f0000003f000000;
          auVar140._12_4_ = 0x3f000000;
          auVar140._16_4_ = 0x3f000000;
          auVar140._20_4_ = 0x3f000000;
          auVar140._24_4_ = 0x3f000000;
          auVar140._28_4_ = 0x3f000000;
          auVar425 = vpternlogd_avx512vl(auVar425,auVar936,auVar140,0xea);
          uVar283 = vcmpps_avx512vl(auVar425,auVar1050,1);
          auVar427 = vaddps_avx512vl(auVar425,auVar1104);
          auVar425 = vaddps_avx512vl(auVar427,auVar425);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar457._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar427._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar457._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar427._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar457._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar427._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar457._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar427._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar457._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar427._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar457._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar427._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar457._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar427._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar457._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar427._28_4_;
          auVar427 = vmulps_avx512vl(auVar457,auVar457);
          auVar425 = vfmadd213ps_avx512vl(auVar855,auVar457,auVar1254);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar457,auVar1302);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar457,auVar1356);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar457,auVar1410);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar457,auVar1464);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar457,auVar1517);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar457,auVar1570);
          auVar425 = vfmadd213ps_avx512vl(auVar425,auVar457,auVar495);
          auVar412 = vmulps_avx512vl(auVar427,auVar457);
          auVar192._4_4_ = auVar425._4_4_ * auVar412._4_4_;
          auVar192._0_4_ = auVar425._0_4_ * auVar412._0_4_;
          auVar192._8_4_ = auVar425._8_4_ * auVar412._8_4_;
          auVar192._12_4_ = auVar425._12_4_ * auVar412._12_4_;
          auVar192._16_4_ = auVar425._16_4_ * auVar412._16_4_;
          auVar192._20_4_ = auVar425._20_4_ * auVar412._20_4_;
          auVar192._24_4_ = auVar425._24_4_ * auVar412._24_4_;
          auVar192._28_4_ = auVar412._28_4_;
          auVar425 = vpaddd_avx512vl(auVar418,auVar995);
          auVar425 = vcvtdq2ps_avx(auVar425);
          auVar418 = vsubps_avx512vl(auVar425,auVar1155);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar458._0_4_ = (uint)bVar281 * auVar418._0_4_ | (uint)!bVar281 * auVar425._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar458._4_4_ = (uint)bVar281 * auVar418._4_4_ | (uint)!bVar281 * auVar425._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar458._8_4_ = (uint)bVar281 * auVar418._8_4_ | (uint)!bVar281 * auVar425._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar458._12_4_ = (uint)bVar281 * auVar418._12_4_ | (uint)!bVar281 * auVar425._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar458._16_4_ = (uint)bVar281 * auVar418._16_4_ | (uint)!bVar281 * auVar425._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar458._20_4_ = (uint)bVar281 * auVar418._20_4_ | (uint)!bVar281 * auVar425._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar458._24_4_ = (uint)bVar281 * auVar418._24_4_ | (uint)!bVar281 * auVar425._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar458._28_4_ = (uint)bVar281 * auVar418._28_4_ | (uint)!bVar281 * auVar425._28_4_;
          auVar425 = vfmadd231ps_avx512vl(auVar192,auVar458,auVar444);
          auVar425 = vfmsub231ps_avx512vl(auVar425,auVar558,auVar427);
          auVar425 = vsubps_avx512vl(auVar425,auVar457);
          auVar425 = vfmsub231ps_avx512vl(auVar425,auVar498,auVar458);
          bVar281 = (bool)((byte)uVar279 & 1);
          bVar12 = (bool)((byte)(uVar279 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar279 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar279 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar279 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar279 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar279 >> 6) & 1);
          bVar18 = SUB81(uVar279 >> 7,0);
          auVar193._4_4_ =
               (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar425._4_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar193._0_4_ =
               (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar425._0_4_) *
               *(float *)*(undefined1 (*) [64])ptr;
          auVar193._8_4_ =
               (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar425._8_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar193._12_4_ =
               (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar425._12_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar193._16_4_ =
               (float)((uint)bVar15 * auVar411._16_4_ | (uint)!bVar15 * auVar425._16_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          auVar193._20_4_ =
               (float)((uint)bVar16 * auVar411._20_4_ | (uint)!bVar16 * auVar425._20_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          auVar193._24_4_ =
               (float)((uint)bVar17 * auVar411._24_4_ | (uint)!bVar17 * auVar425._24_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          auVar193._28_4_ = (uint)bVar18 * auVar411._28_4_ | (uint)!bVar18 * auVar425._28_4_;
          auVar425 = vminps_avx512vl(auVar193,auVar499);
          auVar425 = vmaxps_avx512vl(auVar425,auVar502);
          auVar418 = vfmadd231ps_avx512vl(auVar558,auVar425,auVar503);
          auVar427 = vrndscaleps_avx512vl(auVar418,1);
          uVar283 = vcmpps_avx512vl(auVar418,auVar427,1);
          auVar412 = vsubps_avx512vl(auVar427,auVar1155);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar459._0_4_ = (uint)bVar281 * auVar412._0_4_ | (uint)!bVar281 * auVar427._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar459._4_4_ = (uint)bVar281 * auVar412._4_4_ | (uint)!bVar281 * auVar427._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar459._8_4_ = (uint)bVar281 * auVar412._8_4_ | (uint)!bVar281 * auVar427._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar459._12_4_ = (uint)bVar281 * auVar412._12_4_ | (uint)!bVar281 * auVar427._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar459._16_4_ = (uint)bVar281 * auVar412._16_4_ | (uint)!bVar281 * auVar427._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar459._20_4_ = (uint)bVar281 * auVar412._20_4_ | (uint)!bVar281 * auVar427._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar459._24_4_ = (uint)bVar281 * auVar412._24_4_ | (uint)!bVar281 * auVar427._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar459._28_4_ = (uint)bVar281 * auVar412._28_4_ | (uint)!bVar281 * auVar427._28_4_;
          auVar425 = vfmsub231ps_avx512vl(auVar425,auVar459,auVar498);
          auVar425 = vfnmsub231ps_avx512vl(auVar425,auVar459,auVar444);
          auVar194._4_4_ = auVar425._4_4_ * auVar425._4_4_;
          auVar194._0_4_ = auVar425._0_4_ * auVar425._0_4_;
          auVar194._8_4_ = auVar425._8_4_ * auVar425._8_4_;
          auVar194._12_4_ = auVar425._12_4_ * auVar425._12_4_;
          auVar194._16_4_ = auVar425._16_4_ * auVar425._16_4_;
          auVar194._20_4_ = auVar425._20_4_ * auVar425._20_4_;
          auVar194._24_4_ = auVar425._24_4_ * auVar425._24_4_;
          auVar194._28_4_ = auVar418._28_4_;
          auVar418 = vfmadd213ps_avx512vl(auVar504,auVar425,auVar420);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar421);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar422);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar423);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar558);
          auVar425 = vfmadd213ps_avx512vl(auVar418,auVar194,auVar425);
          auVar418 = vcvttps2dq_avx512vl(auVar459);
          auVar418 = vpslld_avx2(auVar418,0x17);
          auVar418 = vpaddd_avx512vl(auVar418,auVar424);
          auVar425 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar418);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar425;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        fVar666 = *ptr1;
        auVar675._4_4_ = fVar666;
        auVar675._0_4_ = fVar666;
        auVar675._8_4_ = fVar666;
        auVar675._12_4_ = fVar666;
        lVar280 = 0;
        auVar967._8_4_ = 0xffffff82;
        auVar967._0_8_ = 0xffffff82ffffff82;
        auVar967._12_4_ = 0xffffff82;
        auVar1025._8_4_ = 0x3f3504f3;
        auVar1025._0_8_ = 0x3f3504f33f3504f3;
        auVar1025._12_4_ = 0x3f3504f3;
        auVar1080._8_4_ = 0xbf800000;
        auVar1080._0_8_ = 0xbf800000bf800000;
        auVar1080._12_4_ = 0xbf800000;
        auVar1133._8_4_ = 0x3f800000;
        auVar1133._0_8_ = 0x3f8000003f800000;
        auVar1133._12_4_ = 0x3f800000;
        auVar821._8_4_ = 0x3d9021bb;
        auVar821._0_8_ = 0x3d9021bb3d9021bb;
        auVar821._12_4_ = 0x3d9021bb;
        auVar1230._8_4_ = 0xbdebd1b8;
        auVar1230._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1230._12_4_ = 0xbdebd1b8;
        auVar1278._8_4_ = 0x3def251a;
        auVar1278._0_8_ = 0x3def251a3def251a;
        auVar1278._12_4_ = 0x3def251a;
        auVar1332._8_4_ = 0xbdfe5d4f;
        auVar1332._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1332._12_4_ = 0xbdfe5d4f;
        auVar1386._8_4_ = 0x3e11e9bf;
        auVar1386._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1386._12_4_ = 0x3e11e9bf;
        auVar1440._8_4_ = 0xbe2aae50;
        auVar1440._0_8_ = 0xbe2aae50be2aae50;
        auVar1440._12_4_ = 0xbe2aae50;
        auVar1493._8_4_ = 0x3e4cceac;
        auVar1493._0_8_ = 0x3e4cceac3e4cceac;
        auVar1493._12_4_ = 0x3e4cceac;
        auVar1547._8_4_ = 0xbe7ffffc;
        auVar1547._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1547._12_4_ = 0xbe7ffffc;
        auVar350 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar351 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar355 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        uVar279 = vcmpps_avx512vl(auVar675,(undefined1  [16])0x0,2);
        auVar287 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
        auVar356 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar359 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar395 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar396 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar296 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar299 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
          auVar68._8_4_ = 0x800000;
          auVar68._0_8_ = 0x80000000800000;
          auVar68._12_4_ = 0x800000;
          auVar300 = vmaxps_avx512vl(auVar675,auVar68);
          auVar301 = vpsrld_avx512vl(auVar300,0x17);
          auVar913._8_4_ = 0x807fffff;
          auVar913._0_8_ = 0x807fffff807fffff;
          auVar913._12_4_ = 0x807fffff;
          auVar69._8_4_ = 0x3f000000;
          auVar69._0_8_ = 0x3f0000003f000000;
          auVar69._12_4_ = 0x3f000000;
          auVar300 = vpternlogd_avx512vl(auVar300,auVar913,auVar69,0xea);
          uVar283 = vcmpps_avx512vl(auVar300,auVar1025,1);
          auVar294 = vaddps_avx512vl(auVar300,auVar1080);
          auVar300 = vaddps_avx512vl(auVar294,auVar300);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar326._0_4_ = (uint)bVar281 * auVar300._0_4_ | (uint)!bVar281 * auVar294._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar326._4_4_ = (uint)bVar281 * auVar300._4_4_ | (uint)!bVar281 * auVar294._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar326._8_4_ = (uint)bVar281 * auVar300._8_4_ | (uint)!bVar281 * auVar294._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar326._12_4_ = (uint)bVar281 * auVar300._12_4_ | (uint)!bVar281 * auVar294._12_4_;
          auVar294 = vmulps_avx512vl(auVar326,auVar326);
          auVar300 = vfmadd213ps_avx512vl(auVar821,auVar326,auVar1230);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar326,auVar1278);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar326,auVar1332);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar326,auVar1386);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar326,auVar1440);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar326,auVar1493);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar326,auVar1547);
          auVar300 = vfmadd213ps_avx512vl(auVar300,auVar326,auVar350);
          auVar303 = vmulps_avx512vl(auVar294,auVar326);
          auVar914._0_4_ = auVar300._0_4_ * auVar303._0_4_;
          auVar914._4_4_ = auVar300._4_4_ * auVar303._4_4_;
          auVar914._8_4_ = auVar300._8_4_ * auVar303._8_4_;
          auVar914._12_4_ = auVar300._12_4_ * auVar303._12_4_;
          auVar300 = vpaddd_avx512vl(auVar301,auVar967);
          auVar300 = vcvtdq2ps_avx(auVar300);
          auVar301 = vsubps_avx512vl(auVar300,auVar1133);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar327._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar300._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar327._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar300._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar327._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar300._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar327._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar300._12_4_;
          auVar300 = vfmadd231ps_avx512vl(auVar914,auVar327,auVar351);
          auVar300 = vfmsub231ps_avx512vl(auVar300,auVar354,auVar294);
          auVar300 = vsubps_avx512vl(auVar300,auVar326);
          auVar300 = vfmsub231ps_avx512vl(auVar300,auVar355,auVar327);
          bVar281 = (bool)((byte)uVar279 & 1);
          bVar12 = (bool)((byte)(uVar279 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar279 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar279 >> 3) & 1);
          pfVar1599 = (float *)(*(undefined1 (*) [64])ptr + lVar280 * 4);
          auVar915._0_4_ =
               (float)((uint)bVar281 * auVar287._0_4_ | (uint)!bVar281 * auVar300._0_4_) *
               *pfVar1599;
          auVar915._4_4_ =
               (float)((uint)bVar12 * auVar287._4_4_ | (uint)!bVar12 * auVar300._4_4_) *
               pfVar1599[1];
          auVar915._8_4_ =
               (float)((uint)bVar13 * auVar287._8_4_ | (uint)!bVar13 * auVar300._8_4_) *
               pfVar1599[2];
          auVar915._12_4_ =
               (float)((uint)bVar14 * auVar287._12_4_ | (uint)!bVar14 * auVar300._12_4_) *
               pfVar1599[3];
          auVar300 = vminps_avx512vl(auVar915,auVar356);
          auVar300 = vmaxps_avx512vl(auVar300,auVar359);
          auVar301 = vfmadd231ps_avx512vl(auVar354,auVar300,auVar360);
          auVar294 = vcvttps2dq_avx512vl(auVar301);
          auVar294 = vcvtdq2ps_avx512vl(auVar294);
          uVar283 = vcmpps_avx512vl(auVar301,auVar294,1);
          auVar301 = vsubps_avx512vl(auVar294,auVar1133);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar328._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar294._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar328._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar294._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar328._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar294._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar328._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar294._12_4_;
          auVar300 = vfmsub231ps_avx512vl(auVar300,auVar328,auVar355);
          auVar300 = vfnmsub231ps_avx512vl(auVar300,auVar328,auVar351);
          auVar1180._0_4_ = auVar300._0_4_ * auVar300._0_4_;
          auVar1180._4_4_ = auVar300._4_4_ * auVar300._4_4_;
          auVar1180._8_4_ = auVar300._8_4_ * auVar300._8_4_;
          auVar1180._12_4_ = auVar300._12_4_ * auVar300._12_4_;
          auVar301 = vfmadd213ps_avx512vl(auVar395,auVar300,auVar396);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar296);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar297);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar298);
          auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar354);
          auVar300 = vfmadd213ps_avx512vl(auVar301,auVar1180,auVar300);
          auVar301 = vcvttps2dq_avx512vl(auVar328);
          auVar301 = vpslld_avx(auVar301,0x17);
          auVar301 = vpaddd_avx512vl(auVar301,auVar299);
          auVar300 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar301);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar300;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar276 == 0x10) {
        auVar1594 = *(undefined1 (*) [64])ptr;
        auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar632 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar573 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar650 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar574 = vpxord_avx512f(auVar1595,auVar573);
        auVar575 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar576 = vpxord_avx512f(auVar575,auVar573);
        auVar573 = vpxord_avx512f(auVar650,auVar573);
        auVar350 = vxorps_avx512vl(auVar350,auVar350);
        in_ZMM30 = vpternlogd_avx512f(in_ZMM30,in_ZMM30,in_ZMM30,0xff);
        iVar277 = iVar278;
        while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
          in_ZMM31 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar577 = vmaxps_avx512f(in_ZMM31,(undefined1  [64])_ps512_min_norm_pos);
          auVar578 = vpsrld_avx512f(auVar577,0x17);
          auVar577 = vpternlogd_avx512f(auVar577,auVar1595,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          uVar279 = vcmpps_avx512f(auVar577,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar579 = vsubps_avx512f(auVar577,(undefined1  [64])afVar254);
          auVar577 = vaddps_avx512f(auVar579,auVar577);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar580._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar579._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar580._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar579._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar580._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar579._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar580._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar579._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar580._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar579._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar580._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar579._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar580._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar579._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar580._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar579._28_4_;
          bVar11 = (byte)(uVar279 >> 8);
          bVar281 = (bool)(bVar11 & 1);
          auVar580._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar579._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar580._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar579._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar580._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar579._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar580._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar579._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar580._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar579._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar580._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar579._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar580._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar579._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar580._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar579._60_4_;
          auVar577 = vmulps_avx512f(auVar580,auVar580);
          auVar579 = vfmadd132ps_avx512f(auVar580,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar579 = vfmadd213ps_avx512f(auVar579,auVar580,(undefined1  [64])afVar267);
          auVar579 = vfmadd213ps_avx512f(auVar579,auVar580,(undefined1  [64])afVar268);
          auVar579 = vfmadd213ps_avx512f(auVar579,auVar580,(undefined1  [64])afVar269);
          auVar579 = vfmadd213ps_avx512f(auVar579,auVar580,(undefined1  [64])afVar270);
          auVar579 = vfmadd213ps_avx512f(auVar579,auVar580,(undefined1  [64])afVar271);
          auVar579 = vfmadd213ps_avx512f(auVar579,auVar580,(undefined1  [64])afVar272);
          auVar579 = vfmadd213ps_avx512f(auVar579,auVar580,(undefined1  [64])afVar273);
          auVar582 = vmulps_avx512f(auVar577,auVar580);
          auVar579 = vfmadd213ps_avx512f(auVar582,auVar579,auVar580);
          uVar283 = vcmpps_avx512f(in_ZMM31,ZEXT1664(auVar350),2);
          auVar578 = vpsubd_avx512f(auVar578,auVar632);
          auVar578 = vcvtdq2ps_avx512f(auVar578);
          auVar580 = vaddps_avx512f(auVar578,(undefined1  [64])afVar254);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar610._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar580._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar610._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar580._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar610._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar580._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar610._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar580._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar610._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar580._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar610._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar580._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar610._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar580._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar610._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar580._28_4_;
          bVar281 = (bool)(bVar11 & 1);
          auVar610._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar580._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar610._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar580._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar610._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar580._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar610._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar580._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar610._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar580._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar610._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar580._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar610._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar580._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar610._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar580._60_4_;
          auVar578 = vfmadd231ps_avx512f(auVar579,auVar610,auVar650);
          auVar577 = vfmadd231ps_avx512f(auVar578,auVar574,auVar577);
          auVar577 = vfmadd231ps_avx512f(auVar577,auVar575,auVar610);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar578._0_4_ = (uint)bVar281 * in_ZMM30._0_4_ | (uint)!bVar281 * auVar577._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar578._4_4_ = (uint)bVar281 * in_ZMM30._4_4_ | (uint)!bVar281 * auVar577._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar578._8_4_ = (uint)bVar281 * in_ZMM30._8_4_ | (uint)!bVar281 * auVar577._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar578._12_4_ = (uint)bVar281 * in_ZMM30._12_4_ | (uint)!bVar281 * auVar577._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar578._16_4_ = (uint)bVar281 * in_ZMM30._16_4_ | (uint)!bVar281 * auVar577._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar578._20_4_ = (uint)bVar281 * in_ZMM30._20_4_ | (uint)!bVar281 * auVar577._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar578._24_4_ = (uint)bVar281 * in_ZMM30._24_4_ | (uint)!bVar281 * auVar577._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar578._28_4_ = (uint)bVar281 * in_ZMM30._28_4_ | (uint)!bVar281 * auVar577._28_4_;
          bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
          auVar578._32_4_ = (uint)bVar281 * in_ZMM30._32_4_ | (uint)!bVar281 * auVar577._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar578._36_4_ = (uint)bVar281 * in_ZMM30._36_4_ | (uint)!bVar281 * auVar577._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar578._40_4_ = (uint)bVar281 * in_ZMM30._40_4_ | (uint)!bVar281 * auVar577._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar578._44_4_ = (uint)bVar281 * in_ZMM30._44_4_ | (uint)!bVar281 * auVar577._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar578._48_4_ = (uint)bVar281 * in_ZMM30._48_4_ | (uint)!bVar281 * auVar577._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar578._52_4_ = (uint)bVar281 * in_ZMM30._52_4_ | (uint)!bVar281 * auVar577._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar578._56_4_ = (uint)bVar281 * in_ZMM30._56_4_ | (uint)!bVar281 * auVar577._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar578._60_4_ = (uint)bVar281 * in_ZMM30._60_4_ | (uint)!bVar281 * auVar577._60_4_;
          auVar577 = vmulps_avx512f(auVar578,auVar1594);
          auVar577 = vminps_avx512f(auVar577,(undefined1  [64])afVar255);
          auVar577 = vmaxps_avx512f(auVar577,(undefined1  [64])afVar256);
          auVar578 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar577,auVar1595);
          auVar579 = vrndscaleps_avx512f(auVar578,1);
          uVar279 = vcmpps_avx512f(auVar578,auVar579,1);
          auVar578 = vsubps_avx512f(auVar579,(undefined1  [64])afVar254);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar611._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar579._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar611._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar579._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar611._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar579._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar611._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar579._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar611._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar579._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar611._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar579._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar611._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar579._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar611._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar579._28_4_;
          bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
          auVar611._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar579._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar611._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar579._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar611._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar579._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar611._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar579._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar611._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar579._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar611._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar579._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar611._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar579._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar611._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar579._60_4_;
          auVar577 = vfmadd231ps_avx512f(auVar577,auVar611,auVar576);
          auVar577 = vfmadd231ps_avx512f(auVar577,auVar611,auVar573);
          auVar578 = vmulps_avx512f(auVar577,auVar577);
          auVar579 = vfmadd213ps_avx512f(auVar577,(undefined1  [64])afVar258,
                                         (undefined1  [64])afVar259);
          auVar579 = vfmadd213ps_avx512f(auVar579,auVar577,(undefined1  [64])afVar260);
          auVar579 = vfmadd213ps_avx512f(auVar579,auVar577,(undefined1  [64])afVar261);
          auVar579 = vfmadd213ps_avx512f(auVar579,auVar577,(undefined1  [64])afVar262);
          auVar579 = vfmadd213ps_avx512f(auVar579,auVar577,auVar1595);
          auVar577 = vfmadd213ps_avx512f(auVar579,auVar578,auVar577);
          auVar577 = vaddps_avx512f(auVar577,(undefined1  [64])afVar254);
          auVar578 = vcvttps2dq_avx512f(auVar611);
          auVar578 = vpaddd_avx512f(auVar578,auVar632);
          auVar578 = vpslld_avx512f(auVar578,0x17);
          auVar577 = vmulps_avx512f(auVar577,auVar578);
          *(undefined1 (*) [64])outptr = auVar577;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
        }
      }
      afVar269 = _ps512_cephes_log_p8;
      afVar268 = _ps512_cephes_log_p7;
      afVar267 = _ps512_cephes_log_p6;
      afVar266 = _ps512_cephes_log_p5;
      afVar265 = _ps512_cephes_log_p4;
      afVar263 = _ps512_cephes_log_p3;
      afVar262 = _ps512_cephes_log_p2;
      afVar261 = ::_ps512_cephes_exp_p4;
      afVar260 = ::_ps512_cephes_exp_p3;
      afVar259 = ::_ps512_cephes_exp_p2;
      afVar258 = ::_ps512_cephes_exp_p1;
      afVar257 = ::_ps512_cephes_exp_p0;
      afVar256 = ::_ps512_cephes_LOG2EF;
      afVar255 = ::_ps512_exp_lo;
      afVar254 = ::_ps512_exp_hi;
      auVar287 = in_ZMM30._0_16_;
      if (iVar276 == 8) {
        auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_1);
        auVar632 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar573 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar650 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar574 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar575 = vpxord_avx512f(auVar632,auVar650);
        auVar576 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar577 = vpxord_avx512f(auVar576,auVar650);
        auVar650 = vpxord_avx512f(auVar574,auVar650);
        iVar277 = 0;
        auVar287 = vxorps_avx512vl(auVar350,auVar350);
        auVar578 = vpternlogd_avx512f(in_ZMM30,in_ZMM30,in_ZMM30,0xff);
        for (; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
          auVar411 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          fVar666 = ptr1[1];
          auVar868._4_4_ = fVar666;
          auVar868._0_4_ = fVar666;
          auVar868._8_4_ = fVar666;
          auVar868._12_4_ = fVar666;
          auVar868._16_4_ = fVar666;
          auVar868._20_4_ = fVar666;
          auVar868._24_4_ = fVar666;
          auVar868._28_4_ = fVar666;
          auVar579 = vinsertf64x4_avx512f(ZEXT3264(auVar411),auVar868,1);
          auVar580 = vmaxps_avx512f(auVar579,(undefined1  [64])_ps512_min_norm_pos);
          auVar582 = vpsrld_avx512f(auVar580,0x17);
          auVar580 = vpternlogd_avx512f(auVar580,auVar632,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          uVar279 = vcmpps_avx512f(auVar580,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar581 = vsubps_avx512f(auVar580,auVar1595);
          auVar580 = vaddps_avx512f(auVar581,auVar580);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar624._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar581._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar624._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar581._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar624._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar581._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar624._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar581._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar624._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar581._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar624._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar581._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar624._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar581._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar624._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar581._28_4_;
          bVar11 = (byte)(uVar279 >> 8);
          bVar281 = (bool)(bVar11 & 1);
          auVar624._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar581._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar624._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar581._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar624._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar581._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar624._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar581._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar624._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar581._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar624._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar581._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar624._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar581._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar624._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar581._60_4_;
          in_ZMM31 = vmulps_avx512f(auVar624,auVar624);
          auVar580 = vfmadd132ps_avx512f(auVar624,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar624,(undefined1  [64])afVar262);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar624,(undefined1  [64])afVar263);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar624,(undefined1  [64])afVar265);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar624,(undefined1  [64])afVar266);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar624,(undefined1  [64])afVar267);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar624,(undefined1  [64])afVar268);
          auVar580 = vfmadd213ps_avx512f(auVar580,auVar624,(undefined1  [64])afVar269);
          auVar581 = vmulps_avx512f(in_ZMM31,auVar624);
          auVar580 = vfmadd213ps_avx512f(auVar581,auVar580,auVar624);
          uVar283 = vcmpps_avx512f(auVar579,ZEXT1664(auVar287),2);
          auVar579 = vpsubd_avx512f(auVar582,auVar573);
          auVar579 = vcvtdq2ps_avx512f(auVar579);
          auVar582 = vaddps_avx512f(auVar579,auVar1595);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar625._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar582._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar625._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar582._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar625._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar582._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar625._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar582._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar625._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar582._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar625._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar582._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar625._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar582._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar625._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar582._28_4_;
          bVar281 = (bool)(bVar11 & 1);
          auVar625._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar582._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar625._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar582._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar625._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar582._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar625._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar582._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar625._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar582._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar625._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar582._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar625._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar582._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar625._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar582._60_4_;
          auVar579 = vfmadd231ps_avx512f(auVar580,auVar625,auVar574);
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar575,in_ZMM31);
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar576,auVar625);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar626._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar579._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar626._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar579._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar626._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar579._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar626._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar579._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar626._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar579._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar626._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar579._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar626._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar579._24_4_;
          bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
          auVar626._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar579._28_4_;
          bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
          auVar626._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar579._32_4_;
          bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
          auVar626._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar579._36_4_;
          bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
          auVar626._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar579._40_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
          auVar626._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar579._44_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
          auVar626._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar579._48_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
          auVar626._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar579._52_4_;
          bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
          auVar626._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar579._56_4_;
          bVar281 = SUB81(uVar283 >> 0xf,0);
          auVar626._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar579._60_4_;
          auVar579 = vmulps_avx512f(auVar626,auVar1594);
          auVar579 = vminps_avx512f(auVar579,(undefined1  [64])afVar254);
          auVar579 = vmaxps_avx512f(auVar579,(undefined1  [64])afVar255);
          auVar580 = vfmadd213ps_avx512f((undefined1  [64])afVar256,auVar579,auVar632);
          auVar582 = vrndscaleps_avx512f(auVar580,1);
          uVar279 = vcmpps_avx512f(auVar580,auVar582,1);
          auVar580 = vsubps_avx512f(auVar582,auVar1595);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar627._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar582._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar627._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar582._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar627._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar582._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar627._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar582._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar627._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar582._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar627._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar582._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar627._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar582._24_4_;
          bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
          auVar627._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar582._28_4_;
          bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
          auVar627._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar582._32_4_;
          bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
          auVar627._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar582._36_4_;
          bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
          auVar627._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar582._40_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
          auVar627._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar582._44_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
          auVar627._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar582._48_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
          auVar627._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar582._52_4_;
          bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
          auVar627._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar582._56_4_;
          bVar281 = SUB81(uVar279 >> 0xf,0);
          auVar627._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar582._60_4_;
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar627,auVar577);
          auVar579 = vfmadd231ps_avx512f(auVar579,auVar627,auVar650);
          auVar580 = vmulps_avx512f(auVar579,auVar579);
          auVar582 = vfmadd213ps_avx512f(auVar579,(undefined1  [64])afVar257,
                                         (undefined1  [64])afVar258);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar259);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar260);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar261);
          auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,auVar632);
          auVar579 = vfmadd213ps_avx512f(auVar582,auVar580,auVar579);
          auVar579 = vaddps_avx512f(auVar579,auVar1595);
          auVar580 = vcvttps2dq_avx512f(auVar627);
          auVar580 = vpaddd_avx512f(auVar580,auVar573);
          auVar580 = vpslld_avx512f(auVar580,0x17);
          auVar579 = vmulps_avx512f(auVar579,auVar580);
          *(undefined1 (*) [64])outptr = auVar579;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
        }
        auVar1066._8_4_ = 0x3f3504f3;
        auVar1066._0_8_ = 0x3f3504f33f3504f3;
        auVar1066._12_4_ = 0x3f3504f3;
        auVar1066._16_4_ = 0x3f3504f3;
        auVar1066._20_4_ = 0x3f3504f3;
        auVar1066._24_4_ = 0x3f3504f3;
        auVar1066._28_4_ = 0x3f3504f3;
        auVar1119._8_4_ = 0xbf800000;
        auVar1119._0_8_ = 0xbf800000bf800000;
        auVar1119._12_4_ = 0xbf800000;
        auVar1119._16_4_ = 0xbf800000;
        auVar1119._20_4_ = 0xbf800000;
        auVar1119._24_4_ = 0xbf800000;
        auVar1119._28_4_ = 0xbf800000;
        auVar1166._8_4_ = 0x3f800000;
        auVar1166._0_8_ = 0x3f8000003f800000;
        auVar1166._12_4_ = 0x3f800000;
        auVar1166._16_4_ = 0x3f800000;
        auVar1166._20_4_ = 0x3f800000;
        auVar1166._24_4_ = 0x3f800000;
        auVar1166._28_4_ = 0x3f800000;
        auVar948._8_4_ = 0x3d9021bb;
        auVar948._0_8_ = 0x3d9021bb3d9021bb;
        auVar948._12_4_ = 0x3d9021bb;
        auVar948._16_4_ = 0x3d9021bb;
        auVar948._20_4_ = 0x3d9021bb;
        auVar948._24_4_ = 0x3d9021bb;
        auVar948._28_4_ = 0x3d9021bb;
        auVar1267._8_4_ = 0xbdebd1b8;
        auVar1267._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1267._12_4_ = 0xbdebd1b8;
        auVar1267._16_4_ = 0xbdebd1b8;
        auVar1267._20_4_ = 0xbdebd1b8;
        auVar1267._24_4_ = 0xbdebd1b8;
        auVar1267._28_4_ = 0xbdebd1b8;
        auVar1317._8_4_ = 0x3def251a;
        auVar1317._0_8_ = 0x3def251a3def251a;
        auVar1317._12_4_ = 0x3def251a;
        auVar1317._16_4_ = 0x3def251a;
        auVar1317._20_4_ = 0x3def251a;
        auVar1317._24_4_ = 0x3def251a;
        auVar1317._28_4_ = 0x3def251a;
        auVar1371._8_4_ = 0xbdfe5d4f;
        auVar1371._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1371._12_4_ = 0xbdfe5d4f;
        auVar1371._16_4_ = 0xbdfe5d4f;
        auVar1371._20_4_ = 0xbdfe5d4f;
        auVar1371._24_4_ = 0xbdfe5d4f;
        auVar1371._28_4_ = 0xbdfe5d4f;
        auVar1425._8_4_ = 0x3e11e9bf;
        auVar1425._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1425._12_4_ = 0x3e11e9bf;
        auVar1425._16_4_ = 0x3e11e9bf;
        auVar1425._20_4_ = 0x3e11e9bf;
        auVar1425._24_4_ = 0x3e11e9bf;
        auVar1425._28_4_ = 0x3e11e9bf;
        auVar1479._8_4_ = 0xbe2aae50;
        auVar1479._0_8_ = 0xbe2aae50be2aae50;
        auVar1479._12_4_ = 0xbe2aae50;
        auVar1479._16_4_ = 0xbe2aae50;
        auVar1479._20_4_ = 0xbe2aae50;
        auVar1479._24_4_ = 0xbe2aae50;
        auVar1479._28_4_ = 0xbe2aae50;
        auVar1532._8_4_ = 0x3e4cceac;
        auVar1532._0_8_ = 0x3e4cceac3e4cceac;
        auVar1532._12_4_ = 0x3e4cceac;
        auVar1532._16_4_ = 0x3e4cceac;
        auVar1532._20_4_ = 0x3e4cceac;
        auVar1532._24_4_ = 0x3e4cceac;
        auVar1532._28_4_ = 0x3e4cceac;
        auVar1585._8_4_ = 0xbe7ffffc;
        auVar1585._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1585._12_4_ = 0xbe7ffffc;
        auVar1585._16_4_ = 0xbe7ffffc;
        auVar1585._20_4_ = 0xbe7ffffc;
        auVar1585._24_4_ = 0xbe7ffffc;
        auVar1585._28_4_ = 0xbe7ffffc;
        auVar495 = vpbroadcastd_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar444 = vpbroadcastd_avx512vl(ZEXT416(0xb95e8083));
        auVar558 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar287 = afVar255._0_16_;
        auVar350 = vxorps_avx512vl(auVar287,auVar287);
        auVar411 = vpcmpeqd_avx2(auVar1595._0_32_,auVar1595._0_32_);
        auVar499 = vpbroadcastd_avx512vl(ZEXT416(0x42b0c0a5));
        auVar502 = vpbroadcastd_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar503 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar424 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar287 = auVar424._0_16_;
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          auVar425 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          uVar279 = vcmpps_avx512vl(auVar425,ZEXT1632(auVar350),2);
          auVar141._8_4_ = 0x800000;
          auVar141._0_8_ = 0x80000000800000;
          auVar141._12_4_ = 0x800000;
          auVar141._16_4_ = 0x800000;
          auVar141._20_4_ = 0x800000;
          auVar141._24_4_ = 0x800000;
          auVar141._28_4_ = 0x800000;
          auVar425 = vmaxps_avx512vl(auVar425,auVar141);
          auVar418 = vpsrld_avx512vl(auVar425,0x17);
          auVar892._8_4_ = 0x807fffff;
          auVar892._0_8_ = 0x807fffff807fffff;
          auVar892._12_4_ = 0x807fffff;
          auVar892._16_4_ = 0x807fffff;
          auVar892._20_4_ = 0x807fffff;
          auVar892._24_4_ = 0x807fffff;
          auVar892._28_4_ = 0x807fffff;
          auVar142._8_4_ = 0x3f000000;
          auVar142._0_8_ = 0x3f0000003f000000;
          auVar142._12_4_ = 0x3f000000;
          auVar142._16_4_ = 0x3f000000;
          auVar142._20_4_ = 0x3f000000;
          auVar142._24_4_ = 0x3f000000;
          auVar142._28_4_ = 0x3f000000;
          auVar425 = vpternlogd_avx512vl(auVar425,auVar892,auVar142,0xea);
          uVar283 = vcmpps_avx512vl(auVar425,auVar1066,1);
          auVar427 = vaddps_avx512vl(auVar425,auVar1119);
          auVar425 = vaddps_avx512vl(auVar427,auVar425);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar530._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar427._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar530._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar427._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar530._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar427._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar530._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar427._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar530._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar427._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar530._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar427._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar530._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar427._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar530._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar427._28_4_;
          auVar427 = vmulps_avx512vl(auVar530,auVar530);
          in_ZMM31 = ZEXT3264(auVar427);
          auVar351 = vfmadd213ps_fma(auVar948,auVar530,auVar1267);
          auVar351 = vfmadd213ps_fma(ZEXT1632(auVar351),auVar530,auVar1317);
          auVar351 = vfmadd213ps_fma(ZEXT1632(auVar351),auVar530,auVar1371);
          auVar351 = vfmadd213ps_fma(ZEXT1632(auVar351),auVar530,auVar1425);
          auVar351 = vfmadd213ps_fma(ZEXT1632(auVar351),auVar530,auVar1479);
          auVar351 = vfmadd213ps_fma(ZEXT1632(auVar351),auVar530,auVar1532);
          auVar351 = vfmadd213ps_fma(ZEXT1632(auVar351),auVar530,auVar1585);
          auVar425 = vfmadd213ps_avx512vl(ZEXT1632(auVar351),auVar530,auVar495);
          auVar412 = vmulps_avx512vl(auVar427,auVar530);
          auVar214._4_4_ = auVar425._4_4_ * auVar412._4_4_;
          auVar214._0_4_ = auVar425._0_4_ * auVar412._0_4_;
          auVar214._8_4_ = auVar425._8_4_ * auVar412._8_4_;
          auVar214._12_4_ = auVar425._12_4_ * auVar412._12_4_;
          auVar214._16_4_ = auVar425._16_4_ * auVar412._16_4_;
          auVar214._20_4_ = auVar425._20_4_ * auVar412._20_4_;
          auVar214._24_4_ = auVar425._24_4_ * auVar412._24_4_;
          auVar214._28_4_ = auVar412._28_4_;
          auVar143._8_4_ = 0xffffff82;
          auVar143._0_8_ = 0xffffff82ffffff82;
          auVar143._12_4_ = 0xffffff82;
          auVar143._16_4_ = 0xffffff82;
          auVar143._20_4_ = 0xffffff82;
          auVar143._24_4_ = 0xffffff82;
          auVar143._28_4_ = 0xffffff82;
          auVar425 = vpaddd_avx512vl(auVar418,auVar143);
          auVar425 = vcvtdq2ps_avx(auVar425);
          auVar418 = vsubps_avx512vl(auVar425,auVar1166);
          bVar281 = (bool)((byte)uVar283 & 1);
          auVar531._0_4_ = (uint)bVar281 * auVar418._0_4_ | (uint)!bVar281 * auVar425._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar531._4_4_ = (uint)bVar281 * auVar418._4_4_ | (uint)!bVar281 * auVar425._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar531._8_4_ = (uint)bVar281 * auVar418._8_4_ | (uint)!bVar281 * auVar425._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar531._12_4_ = (uint)bVar281 * auVar418._12_4_ | (uint)!bVar281 * auVar425._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar531._16_4_ = (uint)bVar281 * auVar418._16_4_ | (uint)!bVar281 * auVar425._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar531._20_4_ = (uint)bVar281 * auVar418._20_4_ | (uint)!bVar281 * auVar425._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar531._24_4_ = (uint)bVar281 * auVar418._24_4_ | (uint)!bVar281 * auVar425._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar531._28_4_ = (uint)bVar281 * auVar418._28_4_ | (uint)!bVar281 * auVar425._28_4_;
          auVar425 = vfmadd231ps_avx512vl(auVar214,auVar531,auVar444);
          auVar425 = vfmsub231ps_avx512vl(auVar425,auVar558,auVar427);
          auVar425 = vsubps_avx(auVar425,auVar530);
          auVar425 = vfmsub231ps_avx512vl(auVar425,auVar498,auVar531);
          bVar281 = (bool)((byte)uVar279 & 1);
          bVar12 = (bool)((byte)(uVar279 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar279 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar279 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar279 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar279 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar279 >> 6) & 1);
          bVar18 = SUB81(uVar279 >> 7,0);
          auVar215._4_4_ =
               (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar425._4_4_) *
               auVar1594._4_4_;
          auVar215._0_4_ =
               (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar425._0_4_) *
               auVar1594._0_4_;
          auVar215._8_4_ =
               (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar425._8_4_) *
               auVar1594._8_4_;
          auVar215._12_4_ =
               (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar425._12_4_) *
               auVar1594._12_4_;
          auVar215._16_4_ =
               (float)((uint)bVar15 * auVar411._16_4_ | (uint)!bVar15 * auVar425._16_4_) *
               auVar1594._16_4_;
          auVar215._20_4_ =
               (float)((uint)bVar16 * auVar411._20_4_ | (uint)!bVar16 * auVar425._20_4_) *
               auVar1594._20_4_;
          auVar215._24_4_ =
               (float)((uint)bVar17 * auVar411._24_4_ | (uint)!bVar17 * auVar425._24_4_) *
               auVar1594._24_4_;
          auVar215._28_4_ = (uint)bVar18 * auVar411._28_4_ | (uint)!bVar18 * auVar425._28_4_;
          auVar425 = vminps_avx512vl(auVar215,auVar499);
          auVar418 = vmaxps_avx512vl(auVar425,auVar502);
          auVar427 = vfmadd231ps_avx512vl(auVar558,auVar418,auVar503);
          auVar425 = vroundps_avx(auVar427,1);
          uVar279 = vcmpps_avx512vl(auVar427,auVar425,1);
          auVar412 = vsubps_avx512vl(auVar425,auVar1166);
          bVar281 = (bool)((byte)uVar279 & 1);
          auVar532._0_4_ = (float)((uint)bVar281 * auVar412._0_4_ | (uint)!bVar281 * auVar425._0_4_)
          ;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          auVar532._4_4_ = (float)((uint)bVar281 * auVar412._4_4_ | (uint)!bVar281 * auVar425._4_4_)
          ;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          auVar532._8_4_ = (float)((uint)bVar281 * auVar412._8_4_ | (uint)!bVar281 * auVar425._8_4_)
          ;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar532._12_4_ =
               (float)((uint)bVar281 * auVar412._12_4_ | (uint)!bVar281 * auVar425._12_4_);
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          auVar532._16_4_ =
               (float)((uint)bVar281 * auVar412._16_4_ | (uint)!bVar281 * auVar425._16_4_);
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          auVar532._20_4_ =
               (float)((uint)bVar281 * auVar412._20_4_ | (uint)!bVar281 * auVar425._20_4_);
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          auVar532._24_4_ =
               (float)((uint)bVar281 * auVar412._24_4_ | (uint)!bVar281 * auVar425._24_4_);
          bVar281 = SUB81(uVar279 >> 7,0);
          auVar532._28_4_ =
               (float)((uint)bVar281 * auVar412._28_4_ | (uint)!bVar281 * auVar425._28_4_);
          auVar425 = vfmsub231ps_avx512vl(auVar418,auVar532,auVar498);
          auVar425 = vfnmsub231ps_avx512vl(auVar425,auVar532,auVar444);
          auVar216._4_4_ = auVar425._4_4_ * auVar425._4_4_;
          auVar216._0_4_ = auVar425._0_4_ * auVar425._0_4_;
          auVar216._8_4_ = auVar425._8_4_ * auVar425._8_4_;
          auVar216._12_4_ = auVar425._12_4_ * auVar425._12_4_;
          auVar216._16_4_ = auVar425._16_4_ * auVar425._16_4_;
          auVar216._20_4_ = auVar425._20_4_ * auVar425._20_4_;
          auVar216._24_4_ = auVar425._24_4_ * auVar425._24_4_;
          auVar216._28_4_ = auVar427._28_4_;
          auVar418 = vfmadd213ps_avx512vl(auVar504,auVar425,auVar420);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar421);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar422);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar423);
          auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar558);
          auVar425 = vfmadd213ps_avx512vl(auVar418,auVar216,auVar425);
          auVar893._0_4_ = (int)auVar532._0_4_;
          auVar893._4_4_ = (int)auVar532._4_4_;
          auVar893._8_4_ = (int)auVar532._8_4_;
          auVar893._12_4_ = (int)auVar532._12_4_;
          auVar893._16_4_ = (int)auVar532._16_4_;
          auVar893._20_4_ = (int)auVar532._20_4_;
          auVar893._24_4_ = (int)auVar532._24_4_;
          auVar893._28_4_ = (int)auVar532._28_4_;
          auVar418 = vpslld_avx2(auVar893,0x17);
          auVar418 = vpaddd_avx512vl(auVar418,auVar424);
          auVar425 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar418);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar425;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      afVar268 = _ps512_cephes_log_p8;
      afVar267 = _ps512_cephes_log_p7;
      afVar266 = _ps512_cephes_log_p6;
      afVar265 = _ps512_cephes_log_p5;
      afVar263 = _ps512_cephes_log_p4;
      afVar262 = _ps512_cephes_log_p3;
      afVar261 = ::_ps512_cephes_exp_p4;
      afVar260 = ::_ps512_cephes_exp_p3;
      afVar259 = ::_ps512_cephes_exp_p2;
      afVar258 = ::_ps512_cephes_exp_p1;
      afVar257 = ::_ps512_cephes_exp_p0;
      afVar256 = ::_ps512_cephes_LOG2EF;
      afVar255 = ::_ps512_exp_lo;
      afVar254 = ::_ps512_exp_hi;
      if (iVar276 != 4) {
        return;
      }
      auVar1594 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar350 = auVar1594._0_16_;
      auVar351 = ZEXT116(0) * auVar350 + ZEXT116(1) * auVar350;
      auVar350 = ZEXT116(0) * auVar1594._16_16_ + ZEXT116(1) * auVar350;
      auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_1);
      auVar632 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
      auVar573 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar650 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar574 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
      auVar575 = vpxord_avx512f(auVar632,auVar650);
      auVar576 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
      auVar577 = vpxord_avx512f(auVar576,auVar650);
      auVar650 = vpxord_avx512f(auVar574,auVar650);
      uVar279 = 0;
      auVar287 = vxorps_avx512vl(auVar287,auVar287);
      auVar578 = vpternlogd_avx512f(in_ZMM31,in_ZMM31,in_ZMM31,0xff);
      for (; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
        fVar666 = ptr1[uVar279 + 3];
        auVar949._20_4_ = fVar666;
        auVar949._16_4_ = fVar666;
        auVar949._24_4_ = fVar666;
        auVar949._28_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 2];
        auVar949._4_4_ = fVar666;
        auVar949._0_4_ = fVar666;
        auVar949._8_4_ = fVar666;
        auVar949._12_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        auVar579 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar949,1);
        auVar580 = vmaxps_avx512f(auVar579,(undefined1  [64])_ps512_min_norm_pos);
        auVar582 = vpsrld_avx512f(auVar580,0x17);
        auVar580 = vpternlogd_avx512f(auVar580,auVar632,(undefined1  [64])_ps512_inv_mant_mask,0xec)
        ;
        uVar283 = vcmpps_avx512f(auVar580,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar581 = vsubps_avx512f(auVar580,auVar1595);
        auVar580 = vaddps_avx512f(auVar581,auVar580);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar641._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar581._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar641._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar581._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar641._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar581._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar641._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar581._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar641._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar581._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar641._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar581._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar641._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar581._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar641._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar581._28_4_;
        bVar11 = (byte)(uVar283 >> 8);
        bVar281 = (bool)(bVar11 & 1);
        auVar641._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar581._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar641._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar581._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar641._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar581._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar641._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar581._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar641._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar581._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar641._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar581._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar641._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar581._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar641._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar581._60_4_;
        auVar580 = vmulps_avx512f(auVar641,auVar641);
        auVar581 = vfmadd132ps_avx512f(auVar641,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar581 = vfmadd213ps_avx512f(auVar581,auVar641,(undefined1  [64])_ps512_cephes_log_p2);
        auVar581 = vfmadd213ps_avx512f(auVar581,auVar641,(undefined1  [64])afVar262);
        auVar581 = vfmadd213ps_avx512f(auVar581,auVar641,(undefined1  [64])afVar263);
        auVar581 = vfmadd213ps_avx512f(auVar581,auVar641,(undefined1  [64])afVar265);
        auVar581 = vfmadd213ps_avx512f(auVar581,auVar641,(undefined1  [64])afVar266);
        auVar581 = vfmadd213ps_avx512f(auVar581,auVar641,(undefined1  [64])afVar267);
        auVar581 = vfmadd213ps_avx512f(auVar581,auVar641,(undefined1  [64])afVar268);
        auVar642 = vmulps_avx512f(auVar580,auVar641);
        auVar581 = vfmadd213ps_avx512f(auVar642,auVar581,auVar641);
        uVar282 = vcmpps_avx512f(auVar579,ZEXT1664(auVar287),2);
        auVar579 = vpsubd_avx512f(auVar582,auVar573);
        auVar579 = vcvtdq2ps_avx512f(auVar579);
        auVar582 = vaddps_avx512f(auVar579,auVar1595);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar643._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar582._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar643._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar582._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar643._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar582._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar643._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar582._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar643._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar582._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar643._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar582._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar643._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar582._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar643._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar582._28_4_;
        bVar281 = (bool)(bVar11 & 1);
        auVar643._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar582._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar643._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar582._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar643._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar582._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar643._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar582._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar643._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar582._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar643._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar582._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar643._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar582._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar643._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar582._60_4_;
        auVar579 = vfmadd231ps_avx512f(auVar581,auVar643,auVar574);
        auVar579 = vfmadd231ps_avx512f(auVar579,auVar575,auVar580);
        auVar579 = vfmadd231ps_avx512f(auVar579,auVar576,auVar643);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar644._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar579._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar644._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar579._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar644._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar579._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar644._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar579._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar644._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar579._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar644._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar579._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar644._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar579._24_4_;
        bVar281 = (bool)((byte)(uVar282 >> 7) & 1);
        auVar644._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar579._28_4_;
        bVar281 = (bool)((byte)(uVar282 >> 8) & 1);
        auVar644._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar579._32_4_;
        bVar281 = (bool)((byte)(uVar282 >> 9) & 1);
        auVar644._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar579._36_4_;
        bVar281 = (bool)((byte)(uVar282 >> 10) & 1);
        auVar644._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar579._40_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xb) & 1);
        auVar644._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar579._44_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xc) & 1);
        auVar644._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar579._48_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xd) & 1);
        auVar644._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar579._52_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xe) & 1);
        auVar644._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar579._56_4_;
        bVar281 = SUB81(uVar282 >> 0xf,0);
        auVar644._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar579._60_4_;
        auVar579 = vmulps_avx512f(auVar644,auVar1594);
        auVar579 = vminps_avx512f(auVar579,(undefined1  [64])afVar254);
        auVar579 = vmaxps_avx512f(auVar579,(undefined1  [64])afVar255);
        auVar580 = vfmadd213ps_avx512f((undefined1  [64])afVar256,auVar579,auVar632);
        auVar582 = vrndscaleps_avx512f(auVar580,1);
        uVar283 = vcmpps_avx512f(auVar580,auVar582,1);
        auVar580 = vsubps_avx512f(auVar582,auVar1595);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar645._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar582._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar645._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar582._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar645._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar582._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar645._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar582._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar645._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar582._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar645._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar582._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar645._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar582._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar645._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar582._28_4_;
        bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
        auVar645._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar582._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar645._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar582._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar645._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar582._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar645._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar582._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar645._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar582._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar645._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar582._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar645._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar582._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar645._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar582._60_4_;
        auVar579 = vfmadd231ps_avx512f(auVar579,auVar645,auVar577);
        auVar579 = vfmadd231ps_avx512f(auVar579,auVar645,auVar650);
        auVar580 = vmulps_avx512f(auVar579,auVar579);
        auVar582 = vfmadd213ps_avx512f(auVar579,(undefined1  [64])afVar257,
                                       (undefined1  [64])afVar258);
        auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar259);
        auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar260);
        auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar261);
        auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,auVar632);
        auVar579 = vfmadd213ps_avx512f(auVar582,auVar580,auVar579);
        auVar579 = vaddps_avx512f(auVar579,auVar1595);
        auVar580 = vcvttps2dq_avx512f(auVar645);
        auVar580 = vpaddd_avx512f(auVar580,auVar573);
        auVar580 = vpslld_avx512f(auVar580,0x17);
        auVar579 = vmulps_avx512f(auVar579,auVar580);
        *(undefined1 (*) [64])outptr = auVar579;
        outptr = (float *)((long)outptr + 0x40);
      }
      auVar1217._8_4_ = 0x3f800000;
      auVar1217._0_8_ = 0x3f8000003f800000;
      auVar1217._12_4_ = 0x3f800000;
      auVar1217._16_4_ = 0x3f800000;
      auVar1217._20_4_ = 0x3f800000;
      auVar1217._24_4_ = 0x3f800000;
      auVar1217._28_4_ = 0x3f800000;
      auVar1067._8_4_ = 0x3d9021bb;
      auVar1067._0_8_ = 0x3d9021bb3d9021bb;
      auVar1067._12_4_ = 0x3d9021bb;
      auVar1067._16_4_ = 0x3d9021bb;
      auVar1067._20_4_ = 0x3d9021bb;
      auVar1067._24_4_ = 0x3d9021bb;
      auVar1067._28_4_ = 0x3d9021bb;
      auVar1318._8_4_ = 0xbdebd1b8;
      auVar1318._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1318._12_4_ = 0xbdebd1b8;
      auVar1318._16_4_ = 0xbdebd1b8;
      auVar1318._20_4_ = 0xbdebd1b8;
      auVar1318._24_4_ = 0xbdebd1b8;
      auVar1318._28_4_ = 0xbdebd1b8;
      auVar1372._8_4_ = 0x3def251a;
      auVar1372._0_8_ = 0x3def251a3def251a;
      auVar1372._12_4_ = 0x3def251a;
      auVar1372._16_4_ = 0x3def251a;
      auVar1372._20_4_ = 0x3def251a;
      auVar1372._24_4_ = 0x3def251a;
      auVar1372._28_4_ = 0x3def251a;
      auVar1426._8_4_ = 0xbdfe5d4f;
      auVar1426._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1426._12_4_ = 0xbdfe5d4f;
      auVar1426._16_4_ = 0xbdfe5d4f;
      auVar1426._20_4_ = 0xbdfe5d4f;
      auVar1426._24_4_ = 0xbdfe5d4f;
      auVar1426._28_4_ = 0xbdfe5d4f;
      auVar1480._8_4_ = 0x3e11e9bf;
      auVar1480._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1480._12_4_ = 0x3e11e9bf;
      auVar1480._16_4_ = 0x3e11e9bf;
      auVar1480._20_4_ = 0x3e11e9bf;
      auVar1480._24_4_ = 0x3e11e9bf;
      auVar1480._28_4_ = 0x3e11e9bf;
      auVar1533._8_4_ = 0xbe2aae50;
      auVar1533._0_8_ = 0xbe2aae50be2aae50;
      auVar1533._12_4_ = 0xbe2aae50;
      auVar1533._16_4_ = 0xbe2aae50;
      auVar1533._20_4_ = 0xbe2aae50;
      auVar1533._24_4_ = 0xbe2aae50;
      auVar1533._28_4_ = 0xbe2aae50;
      auVar1586._8_4_ = 0x3e4cceac;
      auVar1586._0_8_ = 0x3e4cceac3e4cceac;
      auVar1586._12_4_ = 0x3e4cceac;
      auVar1586._16_4_ = 0x3e4cceac;
      auVar1586._20_4_ = 0x3e4cceac;
      auVar1586._24_4_ = 0x3e4cceac;
      auVar1586._28_4_ = 0x3e4cceac;
      auVar495 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar558 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar499 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar287 = afVar255._0_16_;
      auVar287 = vxorps_avx512vl(auVar287,auVar287);
      auVar411 = vpcmpeqd_avx2(auVar1595._0_32_,auVar1595._0_32_);
      auVar502 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar503 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar420 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar424 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar425 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
        auVar354 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279 + 1]));
        fVar666 = ptr1[uVar279];
        auVar418 = vinsertf32x4_avx512vl
                             (ZEXT1632(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(fVar666,fVar666))
                                                )),auVar354,1);
        uVar283 = vcmpps_avx512vl(auVar418,ZEXT1632(auVar287),2);
        auVar144._8_4_ = 0x800000;
        auVar144._0_8_ = 0x80000000800000;
        auVar144._12_4_ = 0x800000;
        auVar144._16_4_ = 0x800000;
        auVar144._20_4_ = 0x800000;
        auVar144._24_4_ = 0x800000;
        auVar144._28_4_ = 0x800000;
        auVar418 = vmaxps_avx512vl(auVar418,auVar144);
        auVar427 = vpsrld_avx512vl(auVar418,0x17);
        auVar1010._8_4_ = 0x807fffff;
        auVar1010._0_8_ = 0x807fffff807fffff;
        auVar1010._12_4_ = 0x807fffff;
        auVar1010._16_4_ = 0x807fffff;
        auVar1010._20_4_ = 0x807fffff;
        auVar1010._24_4_ = 0x807fffff;
        auVar1010._28_4_ = 0x807fffff;
        auVar145._8_4_ = 0x3f000000;
        auVar145._0_8_ = 0x3f0000003f000000;
        auVar145._12_4_ = 0x3f000000;
        auVar145._16_4_ = 0x3f000000;
        auVar145._20_4_ = 0x3f000000;
        auVar145._24_4_ = 0x3f000000;
        auVar145._28_4_ = 0x3f000000;
        auVar418 = vpternlogd_avx512vl(auVar418,auVar1010,auVar145,0xea);
        auVar146._8_4_ = 0x3f3504f3;
        auVar146._0_8_ = 0x3f3504f33f3504f3;
        auVar146._12_4_ = 0x3f3504f3;
        auVar146._16_4_ = 0x3f3504f3;
        auVar146._20_4_ = 0x3f3504f3;
        auVar146._24_4_ = 0x3f3504f3;
        auVar146._28_4_ = 0x3f3504f3;
        uVar282 = vcmpps_avx512vl(auVar418,auVar146,1);
        auVar1011._0_4_ = auVar418._0_4_ + -1.0;
        auVar1011._4_4_ = auVar418._4_4_ + -1.0;
        auVar1011._8_4_ = auVar418._8_4_ + -1.0;
        auVar1011._12_4_ = auVar418._12_4_ + -1.0;
        auVar1011._16_4_ = auVar418._16_4_ + -1.0;
        auVar1011._20_4_ = auVar418._20_4_ + -1.0;
        auVar1011._24_4_ = auVar418._24_4_ + -1.0;
        auVar1011._28_4_ = auVar418._28_4_ + -1.0;
        auVar412 = vaddps_avx512vl(auVar1011,auVar418);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar533._0_4_ =
             (float)((uint)bVar281 * auVar412._0_4_ | (uint)!bVar281 * (int)auVar1011._0_4_);
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar533._4_4_ =
             (float)((uint)bVar281 * auVar412._4_4_ | (uint)!bVar281 * (int)auVar1011._4_4_);
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar533._8_4_ =
             (float)((uint)bVar281 * auVar412._8_4_ | (uint)!bVar281 * (int)auVar1011._8_4_);
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar533._12_4_ =
             (float)((uint)bVar281 * auVar412._12_4_ | (uint)!bVar281 * (int)auVar1011._12_4_);
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar533._16_4_ =
             (float)((uint)bVar281 * auVar412._16_4_ | (uint)!bVar281 * (int)auVar1011._16_4_);
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar533._20_4_ =
             (float)((uint)bVar281 * auVar412._20_4_ | (uint)!bVar281 * (int)auVar1011._20_4_);
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar533._24_4_ =
             (float)((uint)bVar281 * auVar412._24_4_ | (uint)!bVar281 * (int)auVar1011._24_4_);
        bVar281 = SUB81(uVar282 >> 7,0);
        auVar533._28_4_ = (uint)bVar281 * auVar412._28_4_ | (uint)!bVar281 * (int)auVar1011._28_4_;
        auVar217._4_4_ = auVar533._4_4_ * auVar533._4_4_;
        auVar217._0_4_ = auVar533._0_4_ * auVar533._0_4_;
        auVar217._8_4_ = auVar533._8_4_ * auVar533._8_4_;
        auVar217._12_4_ = auVar533._12_4_ * auVar533._12_4_;
        auVar217._16_4_ = auVar533._16_4_ * auVar533._16_4_;
        auVar217._20_4_ = auVar533._20_4_ * auVar533._20_4_;
        auVar217._24_4_ = auVar533._24_4_ * auVar533._24_4_;
        auVar217._28_4_ = auVar418._28_4_;
        auVar354 = vfmadd213ps_fma(auVar1067,auVar533,auVar1318);
        auVar354 = vfmadd213ps_fma(ZEXT1632(auVar354),auVar533,auVar1372);
        auVar354 = vfmadd213ps_fma(ZEXT1632(auVar354),auVar533,auVar1426);
        auVar354 = vfmadd213ps_fma(ZEXT1632(auVar354),auVar533,auVar1480);
        auVar354 = vfmadd213ps_fma(ZEXT1632(auVar354),auVar533,auVar1533);
        auVar354 = vfmadd213ps_fma(ZEXT1632(auVar354),auVar533,auVar1586);
        auVar418 = vfmadd213ps_avx512vl(ZEXT1632(auVar354),auVar533,auVar495);
        auVar418 = vfmadd213ps_avx512vl(auVar418,auVar533,auVar444);
        auVar218._4_4_ = auVar418._4_4_ * auVar533._4_4_ * auVar533._4_4_ * auVar533._4_4_;
        auVar218._0_4_ = auVar418._0_4_ * auVar533._0_4_ * auVar533._0_4_ * auVar533._0_4_;
        auVar218._8_4_ = auVar418._8_4_ * auVar533._8_4_ * auVar533._8_4_ * auVar533._8_4_;
        auVar218._12_4_ = auVar418._12_4_ * auVar533._12_4_ * auVar533._12_4_ * auVar533._12_4_;
        auVar218._16_4_ = auVar418._16_4_ * auVar533._16_4_ * auVar533._16_4_ * auVar533._16_4_;
        auVar218._20_4_ = auVar418._20_4_ * auVar533._20_4_ * auVar533._20_4_ * auVar533._20_4_;
        auVar218._24_4_ = auVar418._24_4_ * auVar533._24_4_ * auVar533._24_4_ * auVar533._24_4_;
        auVar218._28_4_ = auVar573._28_4_;
        auVar147._8_4_ = 0xffffff82;
        auVar147._0_8_ = 0xffffff82ffffff82;
        auVar147._12_4_ = 0xffffff82;
        auVar147._16_4_ = 0xffffff82;
        auVar147._20_4_ = 0xffffff82;
        auVar147._24_4_ = 0xffffff82;
        auVar147._28_4_ = 0xffffff82;
        auVar418 = vpaddd_avx512vl(auVar427,auVar147);
        auVar418 = vcvtdq2ps_avx(auVar418);
        auVar427 = vsubps_avx512vl(auVar418,auVar1217);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar534._0_4_ = (uint)bVar281 * auVar427._0_4_ | (uint)!bVar281 * auVar418._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar534._4_4_ = (uint)bVar281 * auVar427._4_4_ | (uint)!bVar281 * auVar418._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar534._8_4_ = (uint)bVar281 * auVar427._8_4_ | (uint)!bVar281 * auVar418._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar534._12_4_ = (uint)bVar281 * auVar427._12_4_ | (uint)!bVar281 * auVar418._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar534._16_4_ = (uint)bVar281 * auVar427._16_4_ | (uint)!bVar281 * auVar418._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar534._20_4_ = (uint)bVar281 * auVar427._20_4_ | (uint)!bVar281 * auVar418._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar534._24_4_ = (uint)bVar281 * auVar427._24_4_ | (uint)!bVar281 * auVar418._24_4_;
        bVar281 = SUB81(uVar282 >> 7,0);
        auVar534._28_4_ = (uint)bVar281 * auVar427._28_4_ | (uint)!bVar281 * auVar418._28_4_;
        auVar418 = vfmadd231ps_avx512vl(auVar218,auVar534,auVar558);
        auVar418 = vfmsub231ps_avx512vl(auVar418,auVar498,auVar217);
        auVar418 = vsubps_avx(auVar418,auVar533);
        auVar418 = vfmsub231ps_avx512vl(auVar418,auVar499,auVar534);
        bVar281 = (bool)((byte)uVar283 & 1);
        bVar12 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar283 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar283 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar283 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar283 >> 6) & 1);
        bVar18 = SUB81(uVar283 >> 7,0);
        auVar219._4_4_ =
             (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar418._4_4_) *
             auVar351._4_4_;
        auVar219._0_4_ =
             (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar418._0_4_) *
             auVar351._0_4_;
        auVar219._8_4_ =
             (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar418._8_4_) *
             auVar351._8_4_;
        auVar219._12_4_ =
             (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar418._12_4_) *
             auVar351._12_4_;
        auVar219._16_4_ =
             (float)((uint)bVar15 * auVar411._16_4_ | (uint)!bVar15 * auVar418._16_4_) *
             auVar350._0_4_;
        auVar219._20_4_ =
             (float)((uint)bVar16 * auVar411._20_4_ | (uint)!bVar16 * auVar418._20_4_) *
             auVar350._4_4_;
        auVar219._24_4_ =
             (float)((uint)bVar17 * auVar411._24_4_ | (uint)!bVar17 * auVar418._24_4_) *
             auVar350._8_4_;
        auVar219._28_4_ = (uint)bVar18 * auVar411._28_4_ | (uint)!bVar18 * auVar418._28_4_;
        auVar418 = vminps_avx512vl(auVar219,auVar502);
        auVar427 = vmaxps_avx512vl(auVar418,auVar503);
        auVar412 = vfmadd231ps_avx512vl(auVar498,auVar427,auVar504);
        auVar418 = vroundps_avx(auVar412,1);
        uVar283 = vcmpps_avx512vl(auVar412,auVar418,1);
        auVar413 = vsubps_avx512vl(auVar418,auVar1217);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar535._0_4_ = (float)((uint)bVar281 * auVar413._0_4_ | (uint)!bVar281 * auVar418._0_4_);
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar535._4_4_ = (float)((uint)bVar281 * auVar413._4_4_ | (uint)!bVar281 * auVar418._4_4_);
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar535._8_4_ = (float)((uint)bVar281 * auVar413._8_4_ | (uint)!bVar281 * auVar418._8_4_);
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar535._12_4_ =
             (float)((uint)bVar281 * auVar413._12_4_ | (uint)!bVar281 * auVar418._12_4_);
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar535._16_4_ =
             (float)((uint)bVar281 * auVar413._16_4_ | (uint)!bVar281 * auVar418._16_4_);
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar535._20_4_ =
             (float)((uint)bVar281 * auVar413._20_4_ | (uint)!bVar281 * auVar418._20_4_);
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar535._24_4_ =
             (float)((uint)bVar281 * auVar413._24_4_ | (uint)!bVar281 * auVar418._24_4_);
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar535._28_4_ =
             (float)((uint)bVar281 * auVar413._28_4_ | (uint)!bVar281 * auVar418._28_4_);
        auVar573 = ZEXT3264(auVar535);
        auVar418 = vfmsub231ps_avx512vl(auVar427,auVar535,auVar499);
        auVar418 = vfnmsub231ps_avx512vl(auVar418,auVar535,auVar558);
        auVar220._4_4_ = auVar418._4_4_ * auVar418._4_4_;
        auVar220._0_4_ = auVar418._0_4_ * auVar418._0_4_;
        auVar220._8_4_ = auVar418._8_4_ * auVar418._8_4_;
        auVar220._12_4_ = auVar418._12_4_ * auVar418._12_4_;
        auVar220._16_4_ = auVar418._16_4_ * auVar418._16_4_;
        auVar220._20_4_ = auVar418._20_4_ * auVar418._20_4_;
        auVar220._24_4_ = auVar418._24_4_ * auVar418._24_4_;
        auVar220._28_4_ = auVar412._28_4_;
        auVar427 = vfmadd213ps_avx512vl(auVar420,auVar418,auVar421);
        auVar427 = vfmadd213ps_avx512vl(auVar427,auVar418,auVar422);
        auVar427 = vfmadd213ps_avx512vl(auVar427,auVar418,auVar423);
        auVar427 = vfmadd213ps_avx512vl(auVar427,auVar418,auVar424);
        auVar427 = vfmadd213ps_avx512vl(auVar427,auVar418,auVar498);
        auVar354 = vfmadd213ps_fma(auVar427,auVar220,auVar418);
        auVar950._0_4_ = (int)auVar535._0_4_;
        auVar950._4_4_ = (int)auVar535._4_4_;
        auVar950._8_4_ = (int)auVar535._8_4_;
        auVar950._12_4_ = (int)auVar535._12_4_;
        auVar950._16_4_ = (int)auVar535._16_4_;
        auVar950._20_4_ = (int)auVar535._20_4_;
        auVar950._24_4_ = (int)auVar535._24_4_;
        auVar950._28_4_ = (int)auVar535._28_4_;
        auVar418 = vpslld_avx2(auVar950,0x17);
        auVar418 = vpaddd_avx512vl(auVar418,auVar425);
        auVar354 = vfmadd213ps_fma(auVar418,ZEXT1632(auVar354),auVar418);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar354);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
      lVar280 = 0;
      auVar1036._8_4_ = 0xffffff82;
      auVar1036._0_8_ = 0xffffff82ffffff82;
      auVar1036._12_4_ = 0xffffff82;
      auVar1091._8_4_ = 0x3f3504f3;
      auVar1091._0_8_ = 0x3f3504f33f3504f3;
      auVar1091._12_4_ = 0x3f3504f3;
      auVar1144._8_4_ = 0xbf800000;
      auVar1144._0_8_ = 0xbf800000bf800000;
      auVar1144._12_4_ = 0xbf800000;
      auVar1191._8_4_ = 0x3f800000;
      auVar1191._0_8_ = 0x3f8000003f800000;
      auVar1191._12_4_ = 0x3f800000;
      auVar924._8_4_ = 0x3d9021bb;
      auVar924._0_8_ = 0x3d9021bb3d9021bb;
      auVar924._12_4_ = 0x3d9021bb;
      auVar1289._8_4_ = 0xbdebd1b8;
      auVar1289._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1289._12_4_ = 0xbdebd1b8;
      auVar1343._8_4_ = 0x3def251a;
      auVar1343._0_8_ = 0x3def251a3def251a;
      auVar1343._12_4_ = 0x3def251a;
      auVar1397._8_4_ = 0xbdfe5d4f;
      auVar1397._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1397._12_4_ = 0xbdfe5d4f;
      auVar1451._8_4_ = 0x3e11e9bf;
      auVar1451._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1451._12_4_ = 0x3e11e9bf;
      auVar1504._8_4_ = 0xbe2aae50;
      auVar1504._0_8_ = 0xbe2aae50be2aae50;
      auVar1504._12_4_ = 0xbe2aae50;
      auVar1557._8_4_ = 0x3e4cceac;
      auVar1557._0_8_ = 0x3e4cceac3e4cceac;
      auVar1557._12_4_ = 0x3e4cceac;
      auVar350 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar355 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar356 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar359 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar360 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar395 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar396 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar296 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar299 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar300 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar287 = vpcmpeqd_avx(auVar351,auVar351);
      auVar351 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        auVar301 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + uVar279 * 4 + lVar280)));
        uVar282 = vcmpps_avx512vl(auVar301,_DAT_0054d070,2);
        auVar70._8_4_ = 0x800000;
        auVar70._0_8_ = 0x80000000800000;
        auVar70._12_4_ = 0x800000;
        auVar301 = vmaxps_avx512vl(auVar301,auVar70);
        auVar294 = vpsrld_avx512vl(auVar301,0x17);
        auVar836._8_4_ = 0x807fffff;
        auVar836._0_8_ = 0x807fffff807fffff;
        auVar836._12_4_ = 0x807fffff;
        auVar71._8_4_ = 0x3f000000;
        auVar71._0_8_ = 0x3f0000003f000000;
        auVar71._12_4_ = 0x3f000000;
        auVar301 = vpternlogd_avx512vl(auVar301,auVar836,auVar71,0xea);
        uVar284 = vcmpps_avx512vl(auVar301,auVar1091,1);
        auVar303 = vaddps_avx512vl(auVar301,auVar1144);
        auVar301 = vaddps_avx512vl(auVar303,auVar301);
        bVar281 = (bool)((byte)uVar284 & 1);
        auVar380._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar303._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar380._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar303._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar380._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar303._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar380._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar303._12_4_;
        auVar303 = vmulps_avx512vl(auVar380,auVar380);
        auVar301 = vfmadd213ps_fma(auVar924,auVar380,auVar1289);
        auVar301 = vfmadd213ps_fma(auVar301,auVar380,auVar1343);
        auVar301 = vfmadd213ps_fma(auVar301,auVar380,auVar1397);
        auVar301 = vfmadd213ps_fma(auVar301,auVar380,auVar1451);
        auVar301 = vfmadd213ps_fma(auVar301,auVar380,auVar1504);
        auVar301 = vfmadd213ps_fma(auVar301,auVar380,auVar1557);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar380,auVar350);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar380,auVar354);
        auVar288 = vmulps_avx512vl(auVar303,auVar380);
        auVar981._0_4_ = auVar301._0_4_ * auVar288._0_4_;
        auVar981._4_4_ = auVar301._4_4_ * auVar288._4_4_;
        auVar981._8_4_ = auVar301._8_4_ * auVar288._8_4_;
        auVar981._12_4_ = auVar301._12_4_ * auVar288._12_4_;
        auVar301 = vpaddd_avx512vl(auVar294,auVar1036);
        auVar301 = vcvtdq2ps_avx(auVar301);
        auVar294 = vsubps_avx512vl(auVar301,auVar1191);
        bVar281 = (bool)((byte)uVar284 & 1);
        auVar381._0_4_ = (uint)bVar281 * auVar294._0_4_ | (uint)!bVar281 * auVar301._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar381._4_4_ = (uint)bVar281 * auVar294._4_4_ | (uint)!bVar281 * auVar301._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar381._8_4_ = (uint)bVar281 * auVar294._8_4_ | (uint)!bVar281 * auVar301._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar381._12_4_ = (uint)bVar281 * auVar294._12_4_ | (uint)!bVar281 * auVar301._12_4_;
        auVar301 = vfmadd231ps_avx512vl(auVar981,auVar381,auVar355);
        auVar301 = vfmsub231ps_avx512vl(auVar301,auVar356,auVar303);
        auVar301 = vsubps_avx(auVar301,auVar380);
        auVar301 = vfmsub231ps_avx512vl(auVar301,auVar359,auVar381);
        bVar281 = (bool)((byte)uVar282 & 1);
        bVar12 = (bool)((byte)(uVar282 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar282 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar837._0_4_ =
             (float)((uint)bVar281 * auVar287._0_4_ | (uint)!bVar281 * auVar301._0_4_) *
             auVar1594._0_4_;
        auVar837._4_4_ =
             (float)((uint)bVar12 * auVar287._4_4_ | (uint)!bVar12 * auVar301._4_4_) *
             auVar1594._4_4_;
        auVar837._8_4_ =
             (float)((uint)bVar13 * auVar287._8_4_ | (uint)!bVar13 * auVar301._8_4_) *
             auVar1594._8_4_;
        auVar837._12_4_ =
             (float)((uint)bVar14 * auVar287._12_4_ | (uint)!bVar14 * auVar301._12_4_) *
             auVar1594._12_4_;
        auVar301 = vminps_avx512vl(auVar837,auVar360);
        auVar294 = vmaxps_avx512vl(auVar301,auVar395);
        auVar303 = vfmadd231ps_avx512vl(auVar356,auVar294,auVar396);
        auVar1241._0_4_ = (int)auVar303._0_4_;
        auVar1241._4_4_ = (int)auVar303._4_4_;
        auVar1241._8_4_ = (int)auVar303._8_4_;
        auVar1241._12_4_ = (int)auVar303._12_4_;
        auVar301 = vcvtdq2ps_avx(auVar1241);
        uVar282 = vcmpps_avx512vl(auVar303,auVar301,1);
        auVar303 = vsubps_avx512vl(auVar301,auVar1191);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar382._0_4_ = (float)((uint)bVar281 * auVar303._0_4_ | (uint)!bVar281 * auVar301._0_4_);
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar382._4_4_ = (float)((uint)bVar281 * auVar303._4_4_ | (uint)!bVar281 * auVar301._4_4_);
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar382._8_4_ = (float)((uint)bVar281 * auVar303._8_4_ | (uint)!bVar281 * auVar301._8_4_);
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar382._12_4_ =
             (float)((uint)bVar281 * auVar303._12_4_ | (uint)!bVar281 * auVar301._12_4_);
        auVar301 = vfmsub231ps_avx512vl(auVar294,auVar382,auVar359);
        auVar301 = vfnmsub231ps_avx512vl(auVar301,auVar382,auVar355);
        auVar982._0_4_ = auVar301._0_4_ * auVar301._0_4_;
        auVar982._4_4_ = auVar301._4_4_ * auVar301._4_4_;
        auVar982._8_4_ = auVar301._8_4_ * auVar301._8_4_;
        auVar982._12_4_ = auVar301._12_4_ * auVar301._12_4_;
        auVar294 = vfmadd213ps_avx512vl(auVar296,auVar301,auVar297);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar298);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar299);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar300);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar356);
        auVar301 = vfmadd213ps_avx512vl(auVar294,auVar982,auVar301);
        auVar838._0_4_ = (int)auVar382._0_4_;
        auVar838._4_4_ = (int)auVar382._4_4_;
        auVar838._8_4_ = (int)auVar382._8_4_;
        auVar838._12_4_ = (int)auVar382._12_4_;
        auVar294 = vpslld_avx(auVar838,0x17);
        auVar294 = vpaddd_avx512vl(auVar294,auVar351);
        auVar301 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar294);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar301;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw == bw) {
      auVar1594 = vmovdqa64_avx512f((undefined1  [64])::_ps512_1);
      auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
      auVar632 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar573 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar650 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
      auVar574 = vpxord_avx512f(auVar1595,auVar573);
      auVar575 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
      auVar576 = vpxord_avx512f(auVar575,auVar573);
      auVar573 = vpxord_avx512f(auVar650,auVar573);
      uVar279 = 0;
      auVar287 = vxorps_avx512vl(auVar287,auVar287);
      auVar577 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
      for (; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar578 = vmaxps_avx512f(*(undefined1 (*) [64])(ptr1 + uVar279),
                                  (undefined1  [64])_ps512_min_norm_pos);
        auVar579 = vpsrld_avx512f(auVar578,0x17);
        auVar578 = vpternlogd_avx512f(auVar578,auVar1595,(undefined1  [64])_ps512_inv_mant_mask,0xec
                                     );
        uVar283 = vcmpps_avx512f(auVar578,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar580 = vsubps_avx512f(auVar578,auVar1594);
        auVar578 = vaddps_avx512f(auVar580,auVar578);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar582._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar580._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar582._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar580._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar582._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar580._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar582._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar580._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar582._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar580._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar582._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar580._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar582._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar580._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar582._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar580._28_4_;
        bVar11 = (byte)(uVar283 >> 8);
        bVar281 = (bool)(bVar11 & 1);
        auVar582._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar580._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar582._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar580._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar582._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar580._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar582._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar580._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar582._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar580._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar582._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar580._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar582._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar580._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar582._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar580._60_4_;
        auVar578 = vmulps_avx512f(auVar582,auVar582);
        auVar580 = vfmadd132ps_avx512f(auVar582,(undefined1  [64])afVar266,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar582,(undefined1  [64])afVar267);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar582,(undefined1  [64])afVar268);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar582,(undefined1  [64])afVar269);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar582,(undefined1  [64])afVar270);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar582,(undefined1  [64])afVar271);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar582,(undefined1  [64])afVar272);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar582,(undefined1  [64])afVar273);
        auVar581 = vmulps_avx512f(auVar578,auVar582);
        auVar580 = vfmadd213ps_avx512f(auVar581,auVar580,auVar582);
        uVar282 = vcmpps_avx512f(*(undefined1 (*) [64])(ptr1 + uVar279),ZEXT1664(auVar287),2);
        auVar579 = vpsubd_avx512f(auVar579,auVar632);
        auVar579 = vcvtdq2ps_avx512f(auVar579);
        auVar582 = vaddps_avx512f(auVar579,auVar1594);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar581._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar582._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar581._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar582._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar581._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar582._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar581._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar582._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar581._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar582._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar581._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar582._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar581._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar582._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar581._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar582._28_4_;
        bVar281 = (bool)(bVar11 & 1);
        auVar581._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar582._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar581._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar582._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar581._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar582._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar581._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar582._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar581._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar582._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar581._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar582._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar581._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar582._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar581._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar582._60_4_;
        auVar579 = vfmadd231ps_avx512f(auVar580,auVar581,auVar650);
        auVar578 = vfmadd231ps_avx512f(auVar579,auVar574,auVar578);
        auVar578 = vfmadd231ps_avx512f(auVar578,auVar575,auVar581);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar579._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar578._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar579._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar578._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar579._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar578._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar579._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar578._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar579._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar578._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar579._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar578._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar579._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar578._24_4_;
        bVar281 = (bool)((byte)(uVar282 >> 7) & 1);
        auVar579._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar578._28_4_;
        bVar281 = (bool)((byte)(uVar282 >> 8) & 1);
        auVar579._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar578._32_4_;
        bVar281 = (bool)((byte)(uVar282 >> 9) & 1);
        auVar579._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar578._36_4_;
        bVar281 = (bool)((byte)(uVar282 >> 10) & 1);
        auVar579._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar578._40_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xb) & 1);
        auVar579._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar578._44_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xc) & 1);
        auVar579._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar578._48_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xd) & 1);
        auVar579._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar578._52_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xe) & 1);
        auVar579._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar578._56_4_;
        bVar281 = SUB81(uVar282 >> 0xf,0);
        auVar579._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar578._60_4_;
        auVar578 = vmulps_avx512f(auVar579,*(undefined1 (*) [64])(ptr + uVar279));
        auVar578 = vminps_avx512f(auVar578,(undefined1  [64])afVar255);
        auVar578 = vmaxps_avx512f(auVar578,(undefined1  [64])afVar256);
        auVar579 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar578,auVar1595);
        auVar580 = vrndscaleps_avx512f(auVar579,1);
        uVar283 = vcmpps_avx512f(auVar579,auVar580,1);
        auVar579 = vsubps_avx512f(auVar580,auVar1594);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar642._0_4_ = (uint)bVar281 * auVar579._0_4_ | (uint)!bVar281 * auVar580._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar642._4_4_ = (uint)bVar281 * auVar579._4_4_ | (uint)!bVar281 * auVar580._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar642._8_4_ = (uint)bVar281 * auVar579._8_4_ | (uint)!bVar281 * auVar580._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar642._12_4_ = (uint)bVar281 * auVar579._12_4_ | (uint)!bVar281 * auVar580._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar642._16_4_ = (uint)bVar281 * auVar579._16_4_ | (uint)!bVar281 * auVar580._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar642._20_4_ = (uint)bVar281 * auVar579._20_4_ | (uint)!bVar281 * auVar580._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar642._24_4_ = (uint)bVar281 * auVar579._24_4_ | (uint)!bVar281 * auVar580._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar642._28_4_ = (uint)bVar281 * auVar579._28_4_ | (uint)!bVar281 * auVar580._28_4_;
        bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
        auVar642._32_4_ = (uint)bVar281 * auVar579._32_4_ | (uint)!bVar281 * auVar580._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar642._36_4_ = (uint)bVar281 * auVar579._36_4_ | (uint)!bVar281 * auVar580._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar642._40_4_ = (uint)bVar281 * auVar579._40_4_ | (uint)!bVar281 * auVar580._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar642._44_4_ = (uint)bVar281 * auVar579._44_4_ | (uint)!bVar281 * auVar580._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar642._48_4_ = (uint)bVar281 * auVar579._48_4_ | (uint)!bVar281 * auVar580._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar642._52_4_ = (uint)bVar281 * auVar579._52_4_ | (uint)!bVar281 * auVar580._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar642._56_4_ = (uint)bVar281 * auVar579._56_4_ | (uint)!bVar281 * auVar580._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar642._60_4_ = (uint)bVar281 * auVar579._60_4_ | (uint)!bVar281 * auVar580._60_4_;
        auVar578 = vfmadd231ps_avx512f(auVar578,auVar642,auVar576);
        auVar578 = vfmadd231ps_avx512f(auVar578,auVar642,auVar573);
        auVar579 = vmulps_avx512f(auVar578,auVar578);
        auVar580 = vfmadd213ps_avx512f(auVar578,(undefined1  [64])afVar258,
                                       (undefined1  [64])afVar259);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar260);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar261);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,(undefined1  [64])afVar262);
        auVar580 = vfmadd213ps_avx512f(auVar580,auVar578,auVar1595);
        auVar578 = vfmadd213ps_avx512f(auVar580,auVar579,auVar578);
        auVar578 = vaddps_avx512f(auVar578,auVar1594);
        auVar579 = vcvttps2dq_avx512f(auVar642);
        auVar579 = vpaddd_avx512f(auVar579,auVar632);
        auVar579 = vpslld_avx512f(auVar579,0x17);
        auVar578 = vmulps_avx512f(auVar578,auVar579);
        *(undefined1 (*) [64])(outptr + uVar279) = auVar578;
      }
      auVar931._8_4_ = 0xffffff82;
      auVar931._0_8_ = 0xffffff82ffffff82;
      auVar931._12_4_ = 0xffffff82;
      auVar931._16_4_ = 0xffffff82;
      auVar931._20_4_ = 0xffffff82;
      auVar931._24_4_ = 0xffffff82;
      auVar931._28_4_ = 0xffffff82;
      auVar989._8_4_ = 0x3f3504f3;
      auVar989._0_8_ = 0x3f3504f33f3504f3;
      auVar989._12_4_ = 0x3f3504f3;
      auVar989._16_4_ = 0x3f3504f3;
      auVar989._20_4_ = 0x3f3504f3;
      auVar989._24_4_ = 0x3f3504f3;
      auVar989._28_4_ = 0x3f3504f3;
      auVar1043._8_4_ = 0xbf800000;
      auVar1043._0_8_ = 0xbf800000bf800000;
      auVar1043._12_4_ = 0xbf800000;
      auVar1043._16_4_ = 0xbf800000;
      auVar1043._20_4_ = 0xbf800000;
      auVar1043._24_4_ = 0xbf800000;
      auVar1043._28_4_ = 0xbf800000;
      auVar1098._8_4_ = 0x3f800000;
      auVar1098._0_8_ = 0x3f8000003f800000;
      auVar1098._12_4_ = 0x3f800000;
      auVar1098._16_4_ = 0x3f800000;
      auVar1098._20_4_ = 0x3f800000;
      auVar1098._24_4_ = 0x3f800000;
      auVar1098._28_4_ = 0x3f800000;
      auVar772._8_4_ = 0x3d9021bb;
      auVar772._0_8_ = 0x3d9021bb3d9021bb;
      auVar772._12_4_ = 0x3d9021bb;
      auVar772._16_4_ = 0x3d9021bb;
      auVar772._20_4_ = 0x3d9021bb;
      auVar772._24_4_ = 0x3d9021bb;
      auVar772._28_4_ = 0x3d9021bb;
      auVar1198._8_4_ = 0xbdebd1b8;
      auVar1198._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1198._12_4_ = 0xbdebd1b8;
      auVar1198._16_4_ = 0xbdebd1b8;
      auVar1198._20_4_ = 0xbdebd1b8;
      auVar1198._24_4_ = 0xbdebd1b8;
      auVar1198._28_4_ = 0xbdebd1b8;
      auVar1248._8_4_ = 0x3def251a;
      auVar1248._0_8_ = 0x3def251a3def251a;
      auVar1248._12_4_ = 0x3def251a;
      auVar1248._16_4_ = 0x3def251a;
      auVar1248._20_4_ = 0x3def251a;
      auVar1248._24_4_ = 0x3def251a;
      auVar1248._28_4_ = 0x3def251a;
      auVar1296._8_4_ = 0xbdfe5d4f;
      auVar1296._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1296._12_4_ = 0xbdfe5d4f;
      auVar1296._16_4_ = 0xbdfe5d4f;
      auVar1296._20_4_ = 0xbdfe5d4f;
      auVar1296._24_4_ = 0xbdfe5d4f;
      auVar1296._28_4_ = 0xbdfe5d4f;
      auVar1350._8_4_ = 0x3e11e9bf;
      auVar1350._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1350._12_4_ = 0x3e11e9bf;
      auVar1350._16_4_ = 0x3e11e9bf;
      auVar1350._20_4_ = 0x3e11e9bf;
      auVar1350._24_4_ = 0x3e11e9bf;
      auVar1350._28_4_ = 0x3e11e9bf;
      auVar1404._8_4_ = 0xbe2aae50;
      auVar1404._0_8_ = 0xbe2aae50be2aae50;
      auVar1404._12_4_ = 0xbe2aae50;
      auVar1404._16_4_ = 0xbe2aae50;
      auVar1404._20_4_ = 0xbe2aae50;
      auVar1404._24_4_ = 0xbe2aae50;
      auVar1404._28_4_ = 0xbe2aae50;
      auVar1458._8_4_ = 0x3e4cceac;
      auVar1458._0_8_ = 0x3e4cceac3e4cceac;
      auVar1458._12_4_ = 0x3e4cceac;
      auVar1458._16_4_ = 0x3e4cceac;
      auVar1458._20_4_ = 0x3e4cceac;
      auVar1458._24_4_ = 0x3e4cceac;
      auVar1458._28_4_ = 0x3e4cceac;
      auVar1511._8_4_ = 0xbe7ffffc;
      auVar1511._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1511._12_4_ = 0xbe7ffffc;
      auVar1511._16_4_ = 0xbe7ffffc;
      auVar1511._20_4_ = 0xbe7ffffc;
      auVar1511._24_4_ = 0xbe7ffffc;
      auVar1511._28_4_ = 0xbe7ffffc;
      auVar1564._8_4_ = 0x3eaaaaaa;
      auVar1564._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar1564._12_4_ = 0x3eaaaaaa;
      auVar1564._16_4_ = 0x3eaaaaaa;
      auVar1564._20_4_ = 0x3eaaaaaa;
      auVar1564._24_4_ = 0x3eaaaaaa;
      auVar1564._28_4_ = 0x3eaaaaaa;
      auVar495 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar558 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar287 = vxorps_avx512vl(auVar354,auVar354);
      auVar411 = vpcmpeqd_avx2(auVar1594._0_32_,auVar1594._0_32_);
      auVar498 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar499 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar502 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar503 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar423 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        uVar283 = vcmpps_avx512vl(*(undefined1 (*) [32])(ptr1 + uVar279),ZEXT1632(auVar287),2);
        auVar129._8_4_ = 0x800000;
        auVar129._0_8_ = 0x80000000800000;
        auVar129._12_4_ = 0x800000;
        auVar129._16_4_ = 0x800000;
        auVar129._20_4_ = 0x800000;
        auVar129._24_4_ = 0x800000;
        auVar129._28_4_ = 0x800000;
        auVar424 = vmaxps_avx512vl(*(undefined1 (*) [32])(ptr1 + uVar279),auVar129);
        auVar425 = vpsrld_avx512vl(auVar424,0x17);
        auVar848._8_4_ = 0x807fffff;
        auVar848._0_8_ = 0x807fffff807fffff;
        auVar848._12_4_ = 0x807fffff;
        auVar848._16_4_ = 0x807fffff;
        auVar848._20_4_ = 0x807fffff;
        auVar848._24_4_ = 0x807fffff;
        auVar848._28_4_ = 0x807fffff;
        auVar130._8_4_ = 0x3f000000;
        auVar130._0_8_ = 0x3f0000003f000000;
        auVar130._12_4_ = 0x3f000000;
        auVar130._16_4_ = 0x3f000000;
        auVar130._20_4_ = 0x3f000000;
        auVar130._24_4_ = 0x3f000000;
        auVar130._28_4_ = 0x3f000000;
        auVar424 = vpternlogd_avx512vl(auVar424,auVar848,auVar130,0xea);
        uVar282 = vcmpps_avx512vl(auVar424,auVar989,1);
        auVar418 = vaddps_avx512vl(auVar424,auVar1043);
        auVar424 = vaddps_avx512vl(auVar418,auVar424);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar426._0_4_ = (uint)bVar281 * auVar424._0_4_ | (uint)!bVar281 * auVar418._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar426._4_4_ = (uint)bVar281 * auVar424._4_4_ | (uint)!bVar281 * auVar418._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar426._8_4_ = (uint)bVar281 * auVar424._8_4_ | (uint)!bVar281 * auVar418._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar426._12_4_ = (uint)bVar281 * auVar424._12_4_ | (uint)!bVar281 * auVar418._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar426._16_4_ = (uint)bVar281 * auVar424._16_4_ | (uint)!bVar281 * auVar418._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar426._20_4_ = (uint)bVar281 * auVar424._20_4_ | (uint)!bVar281 * auVar418._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar426._24_4_ = (uint)bVar281 * auVar424._24_4_ | (uint)!bVar281 * auVar418._24_4_;
        bVar281 = SUB81(uVar282 >> 7,0);
        auVar426._28_4_ = (uint)bVar281 * auVar424._28_4_ | (uint)!bVar281 * auVar418._28_4_;
        auVar418 = vmulps_avx512vl(auVar426,auVar426);
        auVar424 = vfmadd213ps_avx512vl(auVar772,auVar426,auVar1198);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar426,auVar1248);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar426,auVar1296);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar426,auVar1350);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar426,auVar1404);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar426,auVar1458);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar426,auVar1511);
        auVar424 = vfmadd213ps_avx512vl(auVar424,auVar426,auVar1564);
        auVar427 = vmulps_avx512vl(auVar418,auVar426);
        auVar186._4_4_ = auVar427._4_4_ * auVar424._4_4_;
        auVar186._0_4_ = auVar427._0_4_ * auVar424._0_4_;
        auVar186._8_4_ = auVar427._8_4_ * auVar424._8_4_;
        auVar186._12_4_ = auVar427._12_4_ * auVar424._12_4_;
        auVar186._16_4_ = auVar427._16_4_ * auVar424._16_4_;
        auVar186._20_4_ = auVar427._20_4_ * auVar424._20_4_;
        auVar186._24_4_ = auVar427._24_4_ * auVar424._24_4_;
        auVar186._28_4_ = auVar427._28_4_;
        auVar424 = vpaddd_avx512vl(auVar425,auVar931);
        auVar424 = vcvtdq2ps_avx(auVar424);
        auVar425 = vsubps_avx512vl(auVar424,auVar1098);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar428._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar424._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar428._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar424._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar428._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar424._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar428._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar424._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar428._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar424._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar428._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar424._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar428._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar424._24_4_;
        bVar281 = SUB81(uVar282 >> 7,0);
        auVar428._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar424._28_4_;
        auVar424 = vfmadd231ps_avx512vl(auVar186,auVar428,auVar495);
        auVar424 = vfmsub231ps_avx512vl(auVar424,auVar444,auVar418);
        auVar424 = vsubps_avx512vl(auVar424,auVar426);
        auVar424 = vfmsub231ps_avx512vl(auVar424,auVar558,auVar428);
        bVar281 = (bool)((byte)uVar283 & 1);
        bVar12 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar283 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar283 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar283 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar283 >> 6) & 1);
        bVar18 = SUB81(uVar283 >> 7,0);
        pfVar1599 = ptr + uVar279;
        auVar187._4_4_ =
             (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar424._4_4_) * pfVar1599[1];
        auVar187._0_4_ =
             (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar424._0_4_) * *pfVar1599;
        auVar187._8_4_ =
             (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar424._8_4_) * pfVar1599[2];
        auVar187._12_4_ =
             (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar424._12_4_) *
             pfVar1599[3];
        auVar187._16_4_ =
             (float)((uint)bVar15 * auVar411._16_4_ | (uint)!bVar15 * auVar424._16_4_) *
             pfVar1599[4];
        auVar187._20_4_ =
             (float)((uint)bVar16 * auVar411._20_4_ | (uint)!bVar16 * auVar424._20_4_) *
             pfVar1599[5];
        auVar187._24_4_ =
             (float)((uint)bVar17 * auVar411._24_4_ | (uint)!bVar17 * auVar424._24_4_) *
             pfVar1599[6];
        auVar187._28_4_ = (uint)bVar18 * auVar411._28_4_ | (uint)!bVar18 * auVar424._28_4_;
        auVar424 = vminps_avx512vl(auVar187,auVar498);
        auVar424 = vmaxps_avx512vl(auVar424,auVar499);
        auVar425 = vfmadd231ps_avx512vl(auVar444,auVar424,auVar502);
        auVar418 = vrndscaleps_avx512vl(auVar425,1);
        uVar283 = vcmpps_avx512vl(auVar425,auVar418,1);
        auVar427 = vsubps_avx512vl(auVar418,auVar1098);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar429._0_4_ = (uint)bVar281 * auVar427._0_4_ | (uint)!bVar281 * auVar418._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar429._4_4_ = (uint)bVar281 * auVar427._4_4_ | (uint)!bVar281 * auVar418._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar429._8_4_ = (uint)bVar281 * auVar427._8_4_ | (uint)!bVar281 * auVar418._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar429._12_4_ = (uint)bVar281 * auVar427._12_4_ | (uint)!bVar281 * auVar418._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar429._16_4_ = (uint)bVar281 * auVar427._16_4_ | (uint)!bVar281 * auVar418._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar429._20_4_ = (uint)bVar281 * auVar427._20_4_ | (uint)!bVar281 * auVar418._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar429._24_4_ = (uint)bVar281 * auVar427._24_4_ | (uint)!bVar281 * auVar418._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar429._28_4_ = (uint)bVar281 * auVar427._28_4_ | (uint)!bVar281 * auVar418._28_4_;
        auVar424 = vfmsub231ps_avx512vl(auVar424,auVar429,auVar558);
        auVar424 = vfnmsub231ps_avx512vl(auVar424,auVar429,auVar495);
        auVar188._4_4_ = auVar424._4_4_ * auVar424._4_4_;
        auVar188._0_4_ = auVar424._0_4_ * auVar424._0_4_;
        auVar188._8_4_ = auVar424._8_4_ * auVar424._8_4_;
        auVar188._12_4_ = auVar424._12_4_ * auVar424._12_4_;
        auVar188._16_4_ = auVar424._16_4_ * auVar424._16_4_;
        auVar188._20_4_ = auVar424._20_4_ * auVar424._20_4_;
        auVar188._24_4_ = auVar424._24_4_ * auVar424._24_4_;
        auVar188._28_4_ = auVar425._28_4_;
        auVar425 = vfmadd213ps_avx512vl(auVar503,auVar424,auVar504);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar420);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar421);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar422);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar444);
        auVar424 = vfmadd213ps_avx512vl(auVar425,auVar188,auVar424);
        auVar425 = vcvttps2dq_avx512vl(auVar429);
        auVar425 = vpslld_avx2(auVar425,0x17);
        auVar425 = vpaddd_avx512vl(auVar425,auVar423);
        auVar424 = vfmadd213ps_avx512vl(auVar425,auVar424,auVar425);
        *(undefined1 (*) [32])(outptr + uVar279) = auVar424;
      }
      auVar909._8_4_ = 0xffffff82;
      auVar909._0_8_ = 0xffffff82ffffff82;
      auVar909._12_4_ = 0xffffff82;
      auVar962._8_4_ = 0x3f3504f3;
      auVar962._0_8_ = 0x3f3504f33f3504f3;
      auVar962._12_4_ = 0x3f3504f3;
      auVar1020._8_4_ = 0xbf800000;
      auVar1020._0_8_ = 0xbf800000bf800000;
      auVar1020._12_4_ = 0xbf800000;
      auVar1075._8_4_ = 0x3f800000;
      auVar1075._0_8_ = 0x3f8000003f800000;
      auVar1075._12_4_ = 0x3f800000;
      auVar731._8_4_ = 0x3d9021bb;
      auVar731._0_8_ = 0x3d9021bb3d9021bb;
      auVar731._12_4_ = 0x3d9021bb;
      auVar1175._8_4_ = 0xbdebd1b8;
      auVar1175._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1175._12_4_ = 0xbdebd1b8;
      auVar1225._8_4_ = 0x3def251a;
      auVar1225._0_8_ = 0x3def251a3def251a;
      auVar1225._12_4_ = 0x3def251a;
      auVar1273._8_4_ = 0xbdfe5d4f;
      auVar1273._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1273._12_4_ = 0xbdfe5d4f;
      auVar1327._8_4_ = 0x3e11e9bf;
      auVar1327._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1327._12_4_ = 0x3e11e9bf;
      auVar1381._8_4_ = 0xbe2aae50;
      auVar1381._0_8_ = 0xbe2aae50be2aae50;
      auVar1381._12_4_ = 0xbe2aae50;
      auVar1435._8_4_ = 0x3e4cceac;
      auVar1435._0_8_ = 0x3e4cceac3e4cceac;
      auVar1435._12_4_ = 0x3e4cceac;
      auVar1489._8_4_ = 0xbe7ffffc;
      auVar1489._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1489._12_4_ = 0xbe7ffffc;
      auVar1542._8_4_ = 0x3eaaaaaa;
      auVar1542._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar1542._12_4_ = 0x3eaaaaaa;
      auVar350 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar351 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar355 = vxorps_avx512vl(auVar287,auVar287);
      auVar287 = vpcmpeqd_avx(auVar411._0_16_,auVar411._0_16_);
      auVar356 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar359 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar395 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar396 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar296 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar299 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        uVar283 = vcmpps_avx512vl(*(undefined1 (*) [16])(ptr1 + uVar279),auVar355,2);
        auVar61._8_4_ = 0x800000;
        auVar61._0_8_ = 0x80000000800000;
        auVar61._12_4_ = 0x800000;
        auVar300 = vmaxps_avx512vl(*(undefined1 (*) [16])(ptr1 + uVar279),auVar61);
        auVar301 = vpsrld_avx512vl(auVar300,0x17);
        auVar813._8_4_ = 0x807fffff;
        auVar813._0_8_ = 0x807fffff807fffff;
        auVar813._12_4_ = 0x807fffff;
        auVar62._8_4_ = 0x3f000000;
        auVar62._0_8_ = 0x3f0000003f000000;
        auVar62._12_4_ = 0x3f000000;
        auVar300 = vpternlogd_avx512vl(auVar300,auVar813,auVar62,0xea);
        uVar282 = vcmpps_avx512vl(auVar300,auVar962,1);
        auVar294 = vaddps_avx512vl(auVar300,auVar1020);
        auVar300 = vaddps_avx512vl(auVar294,auVar300);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar302._0_4_ = (uint)bVar281 * auVar300._0_4_ | (uint)!bVar281 * auVar294._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar302._4_4_ = (uint)bVar281 * auVar300._4_4_ | (uint)!bVar281 * auVar294._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar302._8_4_ = (uint)bVar281 * auVar300._8_4_ | (uint)!bVar281 * auVar294._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar302._12_4_ = (uint)bVar281 * auVar300._12_4_ | (uint)!bVar281 * auVar294._12_4_;
        auVar294 = vmulps_avx512vl(auVar302,auVar302);
        auVar300 = vfmadd213ps_avx512vl(auVar731,auVar302,auVar1175);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar302,auVar1225);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar302,auVar1273);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar302,auVar1327);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar302,auVar1381);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar302,auVar1435);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar302,auVar1489);
        auVar300 = vfmadd213ps_avx512vl(auVar300,auVar302,auVar1542);
        auVar303 = vmulps_avx512vl(auVar294,auVar302);
        auVar814._0_4_ = auVar303._0_4_ * auVar300._0_4_;
        auVar814._4_4_ = auVar303._4_4_ * auVar300._4_4_;
        auVar814._8_4_ = auVar303._8_4_ * auVar300._8_4_;
        auVar814._12_4_ = auVar303._12_4_ * auVar300._12_4_;
        auVar300 = vpaddd_avx512vl(auVar301,auVar909);
        auVar300 = vcvtdq2ps_avx(auVar300);
        auVar301 = vsubps_avx512vl(auVar300,auVar1075);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar304._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar300._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar304._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar300._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar304._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar300._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar304._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar300._12_4_;
        auVar300 = vfmadd231ps_avx512vl(auVar814,auVar304,auVar350);
        auVar300 = vfmsub231ps_avx512vl(auVar300,auVar351,auVar294);
        auVar300 = vsubps_avx512vl(auVar300,auVar302);
        auVar300 = vfmsub231ps_avx512vl(auVar300,auVar354,auVar304);
        bVar281 = (bool)((byte)uVar283 & 1);
        bVar12 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar283 >> 3) & 1);
        pfVar1599 = ptr + uVar279;
        auVar815._0_4_ =
             (float)((uint)bVar281 * auVar287._0_4_ | (uint)!bVar281 * auVar300._0_4_) * *pfVar1599;
        auVar815._4_4_ =
             (float)((uint)bVar12 * auVar287._4_4_ | (uint)!bVar12 * auVar300._4_4_) * pfVar1599[1];
        auVar815._8_4_ =
             (float)((uint)bVar13 * auVar287._8_4_ | (uint)!bVar13 * auVar300._8_4_) * pfVar1599[2];
        auVar815._12_4_ =
             (float)((uint)bVar14 * auVar287._12_4_ | (uint)!bVar14 * auVar300._12_4_) *
             pfVar1599[3];
        auVar300 = vminps_avx512vl(auVar815,auVar356);
        auVar300 = vmaxps_avx512vl(auVar300,auVar359);
        auVar301 = vfmadd231ps_avx512vl(auVar351,auVar300,auVar360);
        auVar294 = vcvttps2dq_avx512vl(auVar301);
        auVar294 = vcvtdq2ps_avx512vl(auVar294);
        uVar283 = vcmpps_avx512vl(auVar301,auVar294,1);
        auVar301 = vsubps_avx512vl(auVar294,auVar1075);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar305._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar294._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar305._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar294._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar305._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar294._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar305._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar294._12_4_;
        auVar300 = vfmsub231ps_avx512vl(auVar300,auVar305,auVar354);
        auVar300 = vfnmsub231ps_avx512vl(auVar300,auVar305,auVar350);
        auVar1128._0_4_ = auVar300._0_4_ * auVar300._0_4_;
        auVar1128._4_4_ = auVar300._4_4_ * auVar300._4_4_;
        auVar1128._8_4_ = auVar300._8_4_ * auVar300._8_4_;
        auVar1128._12_4_ = auVar300._12_4_ * auVar300._12_4_;
        auVar301 = vfmadd213ps_avx512vl(auVar395,auVar300,auVar396);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar296);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar297);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar298);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar351);
        auVar300 = vfmadd213ps_avx512vl(auVar301,auVar1128,auVar300);
        auVar301 = vcvttps2dq_avx512vl(auVar305);
        auVar301 = vpslld_avx(auVar301,0x17);
        auVar301 = vpaddd_avx512vl(auVar301,auVar299);
        auVar300 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar301);
        *(undefined1 (*) [16])(outptr + uVar279) = auVar300;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        pfVar1599 = outptr;
        fVar666 = powf(*(float *)((long)ptr1 + uVar279 * 4 + lVar280),
                       *(float *)((long)ptr + uVar279 * 4 + lVar280));
        *(float *)((long)outptr + uVar279 * 4 + lVar280) = fVar666;
        lVar280 = lVar280 + 4;
        outptr = pfVar1599;
      }
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003809ba;
      fVar666 = *ptr;
      if (iVar276 == 4) {
        auVar750 = *(undefined1 (*) [16])ptr;
        auVar1594 = ZEXT3264(CONCAT1616(auVar750,auVar750));
      }
      else {
        auVar750._4_4_ = fVar666;
        auVar750._0_4_ = fVar666;
        auVar750._8_4_ = fVar666;
        auVar750._12_4_ = fVar666;
        if (iVar276 == 8) {
          auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar1594 = ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,CONCAT416(
                                                  fVar666,CONCAT412(fVar666,CONCAT48(fVar666,
                                                  CONCAT44(fVar666,fVar666))))))));
          if (iVar276 == 0x10) {
            auVar1594 = vmovdqu64_avx512f(auVar1594);
            _local_78 = auVar1594._0_28_;
            auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_0038ad48;
          }
        }
      }
      auVar1595 = vmovdqu64_avx512f(auVar1594);
      _local_78 = auVar1595._0_28_;
      auVar1594 = vinserti64x4_avx512f(auVar1594,auVar1594._0_32_,1);
LAB_0038ad48:
      auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar632 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar573 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar632);
      auVar650 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar632);
      auVar632 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar632);
      auVar574 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p2);
      uVar279 = 0;
      auVar287 = vxorps_avx512vl(auVar356,auVar356);
      auVar575 = vpternlogd_avx512f(in_ZMM26,in_ZMM26,in_ZMM26,0xff);
      for (; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
        auVar576 = vmaxps_avx512f(*(undefined1 (*) [64])(ptr1 + uVar279),
                                  (undefined1  [64])_ps512_min_norm_pos);
        auVar577 = vpsrld_avx512f(auVar576,0x17);
        auVar576 = vpternlogd_avx512f(auVar576,(undefined1  [64])afVar263,
                                      (undefined1  [64])_ps512_inv_mant_mask,0xec);
        uVar283 = vcmpps_avx512f(auVar576,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar578 = vsubps_avx512f(auVar576,(undefined1  [64])afVar254);
        auVar576 = vaddps_avx512f(auVar578,auVar576);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar651._0_4_ = (uint)bVar281 * auVar576._0_4_ | (uint)!bVar281 * auVar578._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar651._4_4_ = (uint)bVar281 * auVar576._4_4_ | (uint)!bVar281 * auVar578._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar651._8_4_ = (uint)bVar281 * auVar576._8_4_ | (uint)!bVar281 * auVar578._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar651._12_4_ = (uint)bVar281 * auVar576._12_4_ | (uint)!bVar281 * auVar578._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar651._16_4_ = (uint)bVar281 * auVar576._16_4_ | (uint)!bVar281 * auVar578._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar651._20_4_ = (uint)bVar281 * auVar576._20_4_ | (uint)!bVar281 * auVar578._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar651._24_4_ = (uint)bVar281 * auVar576._24_4_ | (uint)!bVar281 * auVar578._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar651._28_4_ = (uint)bVar281 * auVar576._28_4_ | (uint)!bVar281 * auVar578._28_4_;
        bVar11 = (byte)(uVar283 >> 8);
        bVar281 = (bool)(bVar11 & 1);
        auVar651._32_4_ = (uint)bVar281 * auVar576._32_4_ | (uint)!bVar281 * auVar578._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar651._36_4_ = (uint)bVar281 * auVar576._36_4_ | (uint)!bVar281 * auVar578._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar651._40_4_ = (uint)bVar281 * auVar576._40_4_ | (uint)!bVar281 * auVar578._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar651._44_4_ = (uint)bVar281 * auVar576._44_4_ | (uint)!bVar281 * auVar578._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar651._48_4_ = (uint)bVar281 * auVar576._48_4_ | (uint)!bVar281 * auVar578._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar651._52_4_ = (uint)bVar281 * auVar576._52_4_ | (uint)!bVar281 * auVar578._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar651._56_4_ = (uint)bVar281 * auVar576._56_4_ | (uint)!bVar281 * auVar578._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar651._60_4_ = (uint)bVar281 * auVar576._60_4_ | (uint)!bVar281 * auVar578._60_4_;
        auVar576 = vmulps_avx512f(auVar651,auVar651);
        auVar578 = vfmadd132ps_avx512f(auVar651,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar651,(undefined1  [64])afVar267);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar651,(undefined1  [64])afVar268);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar651,(undefined1  [64])afVar269);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar651,(undefined1  [64])afVar270);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar651,(undefined1  [64])afVar271);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar651,(undefined1  [64])afVar272);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar651,(undefined1  [64])afVar273);
        auVar579 = vmulps_avx512f(auVar576,auVar651);
        auVar578 = vfmadd213ps_avx512f(auVar579,auVar578,auVar651);
        uVar282 = vcmpps_avx512f(*(undefined1 (*) [64])(ptr1 + uVar279),ZEXT1664(auVar287),2);
        auVar577 = vpsubd_avx512f(auVar577,auVar1595);
        auVar577 = vcvtdq2ps_avx512f(auVar577);
        auVar579 = vaddps_avx512f(auVar577,(undefined1  [64])afVar254);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar652._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar579._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar652._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar579._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar652._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar579._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar652._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar579._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar652._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar579._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar652._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar579._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar652._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar579._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar652._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar579._28_4_;
        bVar281 = (bool)(bVar11 & 1);
        auVar652._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar579._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar652._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar579._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar652._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar579._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar652._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar579._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar652._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar579._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar652._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar579._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar652._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar579._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar652._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar579._60_4_;
        auVar577 = vfmadd231ps_avx512f(auVar578,auVar652,(undefined1  [64])afVar274);
        auVar576 = vfmadd231ps_avx512f(auVar577,auVar573,auVar576);
        auVar576 = vfmadd231ps_avx512f(auVar576,(undefined1  [64])afVar275,auVar652);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar653._0_4_ = (uint)bVar281 * auVar575._0_4_ | (uint)!bVar281 * auVar576._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar653._4_4_ = (uint)bVar281 * auVar575._4_4_ | (uint)!bVar281 * auVar576._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar653._8_4_ = (uint)bVar281 * auVar575._8_4_ | (uint)!bVar281 * auVar576._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar653._12_4_ = (uint)bVar281 * auVar575._12_4_ | (uint)!bVar281 * auVar576._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar653._16_4_ = (uint)bVar281 * auVar575._16_4_ | (uint)!bVar281 * auVar576._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar653._20_4_ = (uint)bVar281 * auVar575._20_4_ | (uint)!bVar281 * auVar576._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar653._24_4_ = (uint)bVar281 * auVar575._24_4_ | (uint)!bVar281 * auVar576._24_4_;
        bVar281 = (bool)((byte)(uVar282 >> 7) & 1);
        auVar653._28_4_ = (uint)bVar281 * auVar575._28_4_ | (uint)!bVar281 * auVar576._28_4_;
        bVar281 = (bool)((byte)(uVar282 >> 8) & 1);
        auVar653._32_4_ = (uint)bVar281 * auVar575._32_4_ | (uint)!bVar281 * auVar576._32_4_;
        bVar281 = (bool)((byte)(uVar282 >> 9) & 1);
        auVar653._36_4_ = (uint)bVar281 * auVar575._36_4_ | (uint)!bVar281 * auVar576._36_4_;
        bVar281 = (bool)((byte)(uVar282 >> 10) & 1);
        auVar653._40_4_ = (uint)bVar281 * auVar575._40_4_ | (uint)!bVar281 * auVar576._40_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xb) & 1);
        auVar653._44_4_ = (uint)bVar281 * auVar575._44_4_ | (uint)!bVar281 * auVar576._44_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xc) & 1);
        auVar653._48_4_ = (uint)bVar281 * auVar575._48_4_ | (uint)!bVar281 * auVar576._48_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xd) & 1);
        auVar653._52_4_ = (uint)bVar281 * auVar575._52_4_ | (uint)!bVar281 * auVar576._52_4_;
        bVar281 = (bool)((byte)(uVar282 >> 0xe) & 1);
        auVar653._56_4_ = (uint)bVar281 * auVar575._56_4_ | (uint)!bVar281 * auVar576._56_4_;
        bVar281 = SUB81(uVar282 >> 0xf,0);
        auVar653._60_4_ = (uint)bVar281 * auVar575._60_4_ | (uint)!bVar281 * auVar576._60_4_;
        auVar576 = vmulps_avx512f(auVar653,auVar1594);
        auVar576 = vminps_avx512f(auVar576,(undefined1  [64])afVar255);
        auVar576 = vmaxps_avx512f(auVar576,(undefined1  [64])afVar256);
        auVar577 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar576,
                                       (undefined1  [64])afVar263);
        auVar578 = vrndscaleps_avx512f(auVar577,1);
        uVar283 = vcmpps_avx512f(auVar577,auVar578,1);
        auVar577 = vsubps_avx512f(auVar578,(undefined1  [64])afVar254);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar654._0_4_ = (uint)bVar281 * auVar577._0_4_ | (uint)!bVar281 * auVar578._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar654._4_4_ = (uint)bVar281 * auVar577._4_4_ | (uint)!bVar281 * auVar578._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar654._8_4_ = (uint)bVar281 * auVar577._8_4_ | (uint)!bVar281 * auVar578._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar654._12_4_ = (uint)bVar281 * auVar577._12_4_ | (uint)!bVar281 * auVar578._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar654._16_4_ = (uint)bVar281 * auVar577._16_4_ | (uint)!bVar281 * auVar578._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar654._20_4_ = (uint)bVar281 * auVar577._20_4_ | (uint)!bVar281 * auVar578._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar654._24_4_ = (uint)bVar281 * auVar577._24_4_ | (uint)!bVar281 * auVar578._24_4_;
        bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
        auVar654._28_4_ = (uint)bVar281 * auVar577._28_4_ | (uint)!bVar281 * auVar578._28_4_;
        bVar281 = (bool)((byte)(uVar283 >> 8) & 1);
        auVar654._32_4_ = (uint)bVar281 * auVar577._32_4_ | (uint)!bVar281 * auVar578._32_4_;
        bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
        auVar654._36_4_ = (uint)bVar281 * auVar577._36_4_ | (uint)!bVar281 * auVar578._36_4_;
        bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
        auVar654._40_4_ = (uint)bVar281 * auVar577._40_4_ | (uint)!bVar281 * auVar578._40_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
        auVar654._44_4_ = (uint)bVar281 * auVar577._44_4_ | (uint)!bVar281 * auVar578._44_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
        auVar654._48_4_ = (uint)bVar281 * auVar577._48_4_ | (uint)!bVar281 * auVar578._48_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
        auVar654._52_4_ = (uint)bVar281 * auVar577._52_4_ | (uint)!bVar281 * auVar578._52_4_;
        bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
        auVar654._56_4_ = (uint)bVar281 * auVar577._56_4_ | (uint)!bVar281 * auVar578._56_4_;
        bVar281 = SUB81(uVar283 >> 0xf,0);
        auVar654._60_4_ = (uint)bVar281 * auVar577._60_4_ | (uint)!bVar281 * auVar578._60_4_;
        auVar576 = vfmadd231ps_avx512f(auVar576,auVar654,auVar650);
        auVar576 = vfmadd231ps_avx512f(auVar576,auVar654,auVar632);
        auVar577 = vmulps_avx512f(auVar576,auVar576);
        auVar578 = vfmadd213ps_avx512f(auVar576,(undefined1  [64])afVar258,
                                       (undefined1  [64])afVar259);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,auVar574);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar261);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar262);
        auVar578 = vfmadd213ps_avx512f(auVar578,auVar576,(undefined1  [64])afVar263);
        auVar576 = vfmadd213ps_avx512f(auVar578,auVar577,auVar576);
        auVar576 = vaddps_avx512f(auVar576,(undefined1  [64])afVar254);
        auVar577 = vcvttps2dq_avx512f(auVar654);
        auVar577 = vpaddd_avx512f(auVar577,auVar1595);
        auVar577 = vpslld_avx512f(auVar577,0x17);
        auVar576 = vmulps_avx512f(auVar576,auVar577);
        *(undefined1 (*) [64])(outptr + uVar279) = auVar576;
      }
      auVar1072._8_4_ = 0xffffff82;
      auVar1072._0_8_ = 0xffffff82ffffff82;
      auVar1072._12_4_ = 0xffffff82;
      auVar1072._16_4_ = 0xffffff82;
      auVar1072._20_4_ = 0xffffff82;
      auVar1072._24_4_ = 0xffffff82;
      auVar1072._28_4_ = 0xffffff82;
      auVar1125._8_4_ = 0x3f3504f3;
      auVar1125._0_8_ = 0x3f3504f33f3504f3;
      auVar1125._12_4_ = 0x3f3504f3;
      auVar1125._16_4_ = 0x3f3504f3;
      auVar1125._20_4_ = 0x3f3504f3;
      auVar1125._24_4_ = 0x3f3504f3;
      auVar1125._28_4_ = 0x3f3504f3;
      auVar1172._8_4_ = 0xbf800000;
      auVar1172._0_8_ = 0xbf800000bf800000;
      auVar1172._12_4_ = 0xbf800000;
      auVar1172._16_4_ = 0xbf800000;
      auVar1172._20_4_ = 0xbf800000;
      auVar1172._24_4_ = 0xbf800000;
      auVar1172._28_4_ = 0xbf800000;
      auVar1222._8_4_ = 0x3f800000;
      auVar1222._0_8_ = 0x3f8000003f800000;
      auVar1222._12_4_ = 0x3f800000;
      auVar1222._16_4_ = 0x3f800000;
      auVar1222._20_4_ = 0x3f800000;
      auVar1222._24_4_ = 0x3f800000;
      auVar1222._28_4_ = 0x3f800000;
      auVar956._8_4_ = 0x3d9021bb;
      auVar956._0_8_ = 0x3d9021bb3d9021bb;
      auVar956._12_4_ = 0x3d9021bb;
      auVar956._16_4_ = 0x3d9021bb;
      auVar956._20_4_ = 0x3d9021bb;
      auVar956._24_4_ = 0x3d9021bb;
      auVar956._28_4_ = 0x3d9021bb;
      auVar1324._8_4_ = 0xbdebd1b8;
      auVar1324._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1324._12_4_ = 0xbdebd1b8;
      auVar1324._16_4_ = 0xbdebd1b8;
      auVar1324._20_4_ = 0xbdebd1b8;
      auVar1324._24_4_ = 0xbdebd1b8;
      auVar1324._28_4_ = 0xbdebd1b8;
      auVar1378._8_4_ = 0x3def251a;
      auVar1378._0_8_ = 0x3def251a3def251a;
      auVar1378._12_4_ = 0x3def251a;
      auVar1378._16_4_ = 0x3def251a;
      auVar1378._20_4_ = 0x3def251a;
      auVar1378._24_4_ = 0x3def251a;
      auVar1378._28_4_ = 0x3def251a;
      auVar1432._8_4_ = 0xbdfe5d4f;
      auVar1432._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1432._12_4_ = 0xbdfe5d4f;
      auVar1432._16_4_ = 0xbdfe5d4f;
      auVar1432._20_4_ = 0xbdfe5d4f;
      auVar1432._24_4_ = 0xbdfe5d4f;
      auVar1432._28_4_ = 0xbdfe5d4f;
      auVar1486._8_4_ = 0x3e11e9bf;
      auVar1486._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1486._12_4_ = 0x3e11e9bf;
      auVar1486._16_4_ = 0x3e11e9bf;
      auVar1486._20_4_ = 0x3e11e9bf;
      auVar1486._24_4_ = 0x3e11e9bf;
      auVar1486._28_4_ = 0x3e11e9bf;
      auVar1539._8_4_ = 0xbe2aae50;
      auVar1539._0_8_ = 0xbe2aae50be2aae50;
      auVar1539._12_4_ = 0xbe2aae50;
      auVar1539._16_4_ = 0xbe2aae50;
      auVar1539._20_4_ = 0xbe2aae50;
      auVar1539._24_4_ = 0xbe2aae50;
      auVar1539._28_4_ = 0xbe2aae50;
      auVar1591._8_4_ = 0x3e4cceac;
      auVar1591._0_8_ = 0x3e4cceac3e4cceac;
      auVar1591._12_4_ = 0x3e4cceac;
      auVar1591._16_4_ = 0x3e4cceac;
      auVar1591._20_4_ = 0x3e4cceac;
      auVar1591._24_4_ = 0x3e4cceac;
      auVar1591._28_4_ = 0x3e4cceac;
      auVar495 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar558 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar687._8_4_ = 0x3f318000;
      auVar687._0_8_ = 0x3f3180003f318000;
      auVar687._12_4_ = 0x3f318000;
      auVar718._16_4_ = 0x3f318000;
      auVar718._0_16_ = auVar687;
      auVar718._20_4_ = 0x3f318000;
      auVar718._24_4_ = 0x3f318000;
      auVar718._28_4_ = 0x3f318000;
      auVar287 = vxorps_avx512vl(auVar355,auVar355);
      auVar411 = vpcmpeqd_avx2(auVar574._0_32_,auVar574._0_32_);
      auVar499 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar502 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar503 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar504 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar424 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        uVar283 = vcmpps_avx512vl(*(undefined1 (*) [32])(ptr1 + uVar279),ZEXT1632(auVar287),2);
        auVar133._8_4_ = 0x800000;
        auVar133._0_8_ = 0x80000000800000;
        auVar133._12_4_ = 0x800000;
        auVar133._16_4_ = 0x800000;
        auVar133._20_4_ = 0x800000;
        auVar133._24_4_ = 0x800000;
        auVar133._28_4_ = 0x800000;
        auVar425 = vmaxps_avx512vl(*(undefined1 (*) [32])(ptr1 + uVar279),auVar133);
        auVar418 = vpsrld_avx512vl(auVar425,0x17);
        auVar900._8_4_ = 0x807fffff;
        auVar900._0_8_ = 0x807fffff807fffff;
        auVar900._12_4_ = 0x807fffff;
        auVar900._16_4_ = 0x807fffff;
        auVar900._20_4_ = 0x807fffff;
        auVar900._24_4_ = 0x807fffff;
        auVar900._28_4_ = 0x807fffff;
        auVar134._8_4_ = 0x3f000000;
        auVar134._0_8_ = 0x3f0000003f000000;
        auVar134._12_4_ = 0x3f000000;
        auVar134._16_4_ = 0x3f000000;
        auVar134._20_4_ = 0x3f000000;
        auVar134._24_4_ = 0x3f000000;
        auVar134._28_4_ = 0x3f000000;
        auVar425 = vpternlogd_avx512vl(auVar425,auVar900,auVar134,0xea);
        uVar282 = vcmpps_avx512vl(auVar425,auVar1125,1);
        auVar427 = vaddps_avx512vl(auVar425,auVar1172);
        auVar425 = vaddps_avx512vl(auVar427,auVar425);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar562._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar427._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar562._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar427._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar562._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar427._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar562._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar427._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar562._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar427._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar562._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar427._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar562._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar427._24_4_;
        bVar281 = SUB81(uVar282 >> 7,0);
        auVar562._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar427._28_4_;
        auVar427 = vmulps_avx512vl(auVar562,auVar562);
        auVar350 = vfmadd213ps_fma(auVar956,auVar562,auVar1324);
        auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar562,auVar1378);
        auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar562,auVar1432);
        auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar562,auVar1486);
        auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar562,auVar1539);
        auVar350 = vfmadd213ps_fma(ZEXT1632(auVar350),auVar562,auVar1591);
        auVar425 = vfmadd213ps_avx512vl(ZEXT1632(auVar350),auVar562,auVar495);
        auVar425 = vfmadd213ps_avx512vl(auVar425,auVar562,auVar444);
        auVar412 = vmulps_avx512vl(auVar427,auVar562);
        auVar225._4_4_ = auVar425._4_4_ * auVar412._4_4_;
        auVar225._0_4_ = auVar425._0_4_ * auVar412._0_4_;
        auVar225._8_4_ = auVar425._8_4_ * auVar412._8_4_;
        auVar225._12_4_ = auVar425._12_4_ * auVar412._12_4_;
        auVar225._16_4_ = auVar425._16_4_ * auVar412._16_4_;
        auVar225._20_4_ = auVar425._20_4_ * auVar412._20_4_;
        auVar225._24_4_ = auVar425._24_4_ * auVar412._24_4_;
        auVar225._28_4_ = auVar412._28_4_;
        auVar425 = vpaddd_avx512vl(auVar418,auVar1072);
        auVar425 = vcvtdq2ps_avx(auVar425);
        auVar418 = vsubps_avx512vl(auVar425,auVar1222);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar563._0_4_ = (uint)bVar281 * auVar418._0_4_ | (uint)!bVar281 * auVar425._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar563._4_4_ = (uint)bVar281 * auVar418._4_4_ | (uint)!bVar281 * auVar425._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar563._8_4_ = (uint)bVar281 * auVar418._8_4_ | (uint)!bVar281 * auVar425._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar563._12_4_ = (uint)bVar281 * auVar418._12_4_ | (uint)!bVar281 * auVar425._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar563._16_4_ = (uint)bVar281 * auVar418._16_4_ | (uint)!bVar281 * auVar425._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar563._20_4_ = (uint)bVar281 * auVar418._20_4_ | (uint)!bVar281 * auVar425._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar563._24_4_ = (uint)bVar281 * auVar418._24_4_ | (uint)!bVar281 * auVar425._24_4_;
        bVar281 = SUB81(uVar282 >> 7,0);
        auVar563._28_4_ = (uint)bVar281 * auVar418._28_4_ | (uint)!bVar281 * auVar425._28_4_;
        auVar425 = vfmadd231ps_avx512vl(auVar225,auVar563,auVar558);
        auVar425 = vfmsub231ps_avx512vl(auVar425,auVar498,auVar427);
        auVar425 = vsubps_avx(auVar425,auVar562);
        auVar350 = vfmsub231ps_fma(auVar425,auVar718,auVar563);
        bVar281 = (bool)((byte)uVar283 & 1);
        bVar12 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar226._4_4_ =
             (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar350._4_4_) *
             (float)local_78._4_4_;
        auVar226._0_4_ =
             (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar350._0_4_) *
             (float)local_78._0_4_;
        auVar226._8_4_ =
             (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar350._8_4_) * fStack_70;
        auVar226._12_4_ =
             (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar350._12_4_) * fStack_6c;
        auVar226._16_4_ = (float)((uint)((byte)(uVar283 >> 4) & 1) * auVar411._16_4_) * fStack_68;
        auVar226._20_4_ = (float)((uint)((byte)(uVar283 >> 5) & 1) * auVar411._20_4_) * fStack_64;
        auVar226._24_4_ = (float)((uint)((byte)(uVar283 >> 6) & 1) * auVar411._24_4_) * fStack_60;
        auVar226._28_4_ = (uint)(byte)(uVar283 >> 7) * auVar411._28_4_;
        auVar425 = vminps_avx512vl(auVar226,auVar499);
        auVar418 = vmaxps_avx512vl(auVar425,auVar502);
        auVar427 = vfmadd231ps_avx512vl(auVar498,auVar418,auVar503);
        auVar425 = vroundps_avx(auVar427,1);
        uVar283 = vcmpps_avx512vl(auVar427,auVar425,1);
        auVar412 = vsubps_avx512vl(auVar425,auVar1222);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar564._0_4_ = (float)((uint)bVar281 * auVar412._0_4_ | (uint)!bVar281 * auVar425._0_4_);
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar564._4_4_ = (float)((uint)bVar281 * auVar412._4_4_ | (uint)!bVar281 * auVar425._4_4_);
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar564._8_4_ = (float)((uint)bVar281 * auVar412._8_4_ | (uint)!bVar281 * auVar425._8_4_);
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar564._12_4_ =
             (float)((uint)bVar281 * auVar412._12_4_ | (uint)!bVar281 * auVar425._12_4_);
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar564._16_4_ =
             (float)((uint)bVar281 * auVar412._16_4_ | (uint)!bVar281 * auVar425._16_4_);
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar564._20_4_ =
             (float)((uint)bVar281 * auVar412._20_4_ | (uint)!bVar281 * auVar425._20_4_);
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar564._24_4_ =
             (float)((uint)bVar281 * auVar412._24_4_ | (uint)!bVar281 * auVar425._24_4_);
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar564._28_4_ =
             (float)((uint)bVar281 * auVar412._28_4_ | (uint)!bVar281 * auVar425._28_4_);
        auVar350 = vfmsub231ps_fma(auVar418,auVar564,auVar718);
        auVar425 = vfnmsub231ps_avx512vl(ZEXT1632(auVar350),auVar564,auVar558);
        auVar227._4_4_ = auVar425._4_4_ * auVar425._4_4_;
        auVar227._0_4_ = auVar425._0_4_ * auVar425._0_4_;
        auVar227._8_4_ = auVar425._8_4_ * auVar425._8_4_;
        auVar227._12_4_ = auVar425._12_4_ * auVar425._12_4_;
        auVar227._16_4_ = auVar425._16_4_ * auVar425._16_4_;
        auVar227._20_4_ = auVar425._20_4_ * auVar425._20_4_;
        auVar227._24_4_ = auVar425._24_4_ * auVar425._24_4_;
        auVar227._28_4_ = auVar427._28_4_;
        auVar418 = vfmadd213ps_avx512vl(auVar504,auVar425,auVar420);
        auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar421);
        auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar422);
        auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar423);
        auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar498);
        auVar425 = vfmadd213ps_avx512vl(auVar418,auVar227,auVar425);
        auVar901._0_4_ = (int)auVar564._0_4_;
        auVar901._4_4_ = (int)auVar564._4_4_;
        auVar901._8_4_ = (int)auVar564._8_4_;
        auVar901._12_4_ = (int)auVar564._12_4_;
        auVar901._16_4_ = (int)auVar564._16_4_;
        auVar901._20_4_ = (int)auVar564._20_4_;
        auVar901._24_4_ = (int)auVar564._24_4_;
        auVar901._28_4_ = (int)auVar564._28_4_;
        auVar418 = vpslld_avx2(auVar901,0x17);
        auVar418 = vpaddd_avx512vl(auVar418,auVar424);
        auVar425 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar418);
        *(undefined1 (*) [32])(outptr + uVar279) = auVar425;
      }
      auVar986._8_4_ = 0xffffff82;
      auVar986._0_8_ = 0xffffff82ffffff82;
      auVar986._12_4_ = 0xffffff82;
      auVar1040._8_4_ = 0x3f3504f3;
      auVar1040._0_8_ = 0x3f3504f33f3504f3;
      auVar1040._12_4_ = 0x3f3504f3;
      auVar1095._8_4_ = 0xbf800000;
      auVar1095._0_8_ = 0xbf800000bf800000;
      auVar1095._12_4_ = 0xbf800000;
      auVar1148._8_4_ = 0x3f800000;
      auVar1148._0_8_ = 0x3f8000003f800000;
      auVar1148._12_4_ = 0x3f800000;
      auVar841._8_4_ = 0x3d9021bb;
      auVar841._0_8_ = 0x3d9021bb3d9021bb;
      auVar841._12_4_ = 0x3d9021bb;
      auVar1245._8_4_ = 0xbdebd1b8;
      auVar1245._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1245._12_4_ = 0xbdebd1b8;
      auVar1293._8_4_ = 0x3def251a;
      auVar1293._0_8_ = 0x3def251a3def251a;
      auVar1293._12_4_ = 0x3def251a;
      auVar1347._8_4_ = 0xbdfe5d4f;
      auVar1347._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1347._12_4_ = 0xbdfe5d4f;
      auVar1401._8_4_ = 0x3e11e9bf;
      auVar1401._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1401._12_4_ = 0x3e11e9bf;
      auVar1455._8_4_ = 0xbe2aae50;
      auVar1455._0_8_ = 0xbe2aae50be2aae50;
      auVar1455._12_4_ = 0xbe2aae50;
      auVar1508._8_4_ = 0x3e4cceac;
      auVar1508._0_8_ = 0x3e4cceac3e4cceac;
      auVar1508._12_4_ = 0x3e4cceac;
      auVar1561._8_4_ = 0xbe7ffffc;
      auVar1561._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1561._12_4_ = 0xbe7ffffc;
      auVar350 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar351 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar355 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar356 = vxorps_avx512vl(auVar287,auVar287);
      auVar287 = vpcmpeqd_avx(auVar687,auVar687);
      auVar359 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar360 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar395 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar396 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar296 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar299 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar300 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        uVar283 = vcmpps_avx512vl(*(undefined1 (*) [16])(ptr1 + uVar279),auVar356,2);
        auVar64._8_4_ = 0x800000;
        auVar64._0_8_ = 0x80000000800000;
        auVar64._12_4_ = 0x800000;
        auVar301 = vmaxps_avx512vl(*(undefined1 (*) [16])(ptr1 + uVar279),auVar64);
        auVar294 = vpsrld_avx512vl(auVar301,0x17);
        auVar768._8_4_ = 0x807fffff;
        auVar768._0_8_ = 0x807fffff807fffff;
        auVar768._12_4_ = 0x807fffff;
        auVar65._8_4_ = 0x3f000000;
        auVar65._0_8_ = 0x3f0000003f000000;
        auVar65._12_4_ = 0x3f000000;
        auVar301 = vpternlogd_avx512vl(auVar301,auVar768,auVar65,0xea);
        uVar282 = vcmpps_avx512vl(auVar301,auVar1040,1);
        auVar303 = vaddps_avx512vl(auVar301,auVar1095);
        auVar301 = vaddps_avx512vl(auVar303,auVar301);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar400._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar303._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar400._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar303._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar400._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar303._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar400._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar303._12_4_;
        auVar303 = vmulps_avx512vl(auVar400,auVar400);
        auVar301 = vfmadd213ps_fma(auVar841,auVar400,auVar1245);
        auVar301 = vfmadd213ps_fma(auVar301,auVar400,auVar1293);
        auVar301 = vfmadd213ps_fma(auVar301,auVar400,auVar1347);
        auVar301 = vfmadd213ps_fma(auVar301,auVar400,auVar1401);
        auVar301 = vfmadd213ps_fma(auVar301,auVar400,auVar1455);
        auVar301 = vfmadd213ps_fma(auVar301,auVar400,auVar1508);
        auVar301 = vfmadd213ps_fma(auVar301,auVar400,auVar1561);
        auVar301 = vfmadd213ps_avx512vl(auVar301,auVar400,auVar350);
        auVar288 = vmulps_avx512vl(auVar303,auVar400);
        auVar927._0_4_ = auVar301._0_4_ * auVar288._0_4_;
        auVar927._4_4_ = auVar301._4_4_ * auVar288._4_4_;
        auVar927._8_4_ = auVar301._8_4_ * auVar288._8_4_;
        auVar927._12_4_ = auVar301._12_4_ * auVar288._12_4_;
        auVar301 = vpaddd_avx512vl(auVar294,auVar986);
        auVar301 = vcvtdq2ps_avx(auVar301);
        auVar294 = vsubps_avx512vl(auVar301,auVar1148);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar401._0_4_ = (uint)bVar281 * auVar294._0_4_ | (uint)!bVar281 * auVar301._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar401._4_4_ = (uint)bVar281 * auVar294._4_4_ | (uint)!bVar281 * auVar301._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar401._8_4_ = (uint)bVar281 * auVar294._8_4_ | (uint)!bVar281 * auVar301._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar401._12_4_ = (uint)bVar281 * auVar294._12_4_ | (uint)!bVar281 * auVar301._12_4_;
        auVar301 = vfmadd231ps_avx512vl(auVar927,auVar401,auVar351);
        auVar301 = vfmsub231ps_avx512vl(auVar301,auVar354,auVar303);
        auVar301 = vsubps_avx(auVar301,auVar400);
        auVar301 = vfmsub231ps_avx512vl(auVar301,auVar355,auVar401);
        bVar281 = (bool)((byte)uVar283 & 1);
        bVar12 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar283 >> 3) & 1);
        local_b8._0_4_ = auVar750._0_4_;
        local_b8._4_4_ = auVar750._4_4_;
        fStack_b0 = auVar750._8_4_;
        fStack_ac = auVar750._12_4_;
        auVar769._0_4_ =
             (float)((uint)bVar281 * auVar287._0_4_ | (uint)!bVar281 * auVar301._0_4_) *
             (float)local_b8._0_4_;
        auVar769._4_4_ =
             (float)((uint)bVar12 * auVar287._4_4_ | (uint)!bVar12 * auVar301._4_4_) *
             (float)local_b8._4_4_;
        auVar769._8_4_ =
             (float)((uint)bVar13 * auVar287._8_4_ | (uint)!bVar13 * auVar301._8_4_) * fStack_b0;
        auVar769._12_4_ =
             (float)((uint)bVar14 * auVar287._12_4_ | (uint)!bVar14 * auVar301._12_4_) * fStack_ac;
        auVar301 = vminps_avx512vl(auVar769,auVar359);
        auVar294 = vmaxps_avx512vl(auVar301,auVar360);
        auVar303 = vfmadd231ps_avx512vl(auVar354,auVar294,auVar395);
        auVar1195._0_4_ = (int)auVar303._0_4_;
        auVar1195._4_4_ = (int)auVar303._4_4_;
        auVar1195._8_4_ = (int)auVar303._8_4_;
        auVar1195._12_4_ = (int)auVar303._12_4_;
        auVar301 = vcvtdq2ps_avx(auVar1195);
        uVar283 = vcmpps_avx512vl(auVar303,auVar301,1);
        auVar303 = vsubps_avx512vl(auVar301,auVar1148);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar402._0_4_ = (float)((uint)bVar281 * auVar303._0_4_ | (uint)!bVar281 * auVar301._0_4_);
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar402._4_4_ = (float)((uint)bVar281 * auVar303._4_4_ | (uint)!bVar281 * auVar301._4_4_);
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar402._8_4_ = (float)((uint)bVar281 * auVar303._8_4_ | (uint)!bVar281 * auVar301._8_4_);
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar402._12_4_ =
             (float)((uint)bVar281 * auVar303._12_4_ | (uint)!bVar281 * auVar301._12_4_);
        auVar301 = vfmsub231ps_avx512vl(auVar294,auVar402,auVar355);
        auVar301 = vfnmsub231ps_avx512vl(auVar301,auVar402,auVar351);
        auVar928._0_4_ = auVar301._0_4_ * auVar301._0_4_;
        auVar928._4_4_ = auVar301._4_4_ * auVar301._4_4_;
        auVar928._8_4_ = auVar301._8_4_ * auVar301._8_4_;
        auVar928._12_4_ = auVar301._12_4_ * auVar301._12_4_;
        auVar294 = vfmadd213ps_avx512vl(auVar396,auVar301,auVar296);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar297);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar298);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar299);
        auVar294 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar354);
        auVar301 = vfmadd213ps_avx512vl(auVar294,auVar928,auVar301);
        auVar770._0_4_ = (int)auVar402._0_4_;
        auVar770._4_4_ = (int)auVar402._4_4_;
        auVar770._8_4_ = (int)auVar402._8_4_;
        auVar770._12_4_ = (int)auVar402._12_4_;
        auVar294 = vpslld_avx(auVar770,0x17);
        auVar294 = vpaddd_avx512vl(auVar294,auVar300);
        auVar301 = vfmadd213ps_avx512vl(auVar294,auVar301,auVar294);
        *(undefined1 (*) [16])(outptr + uVar279) = auVar301;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        pfVar1599 = outptr;
        fVar667 = powf(*(float *)((long)ptr1 + uVar279 * 4 + lVar280),fVar666);
        *(float *)((long)outptr + uVar279 * 4 + lVar280) = fVar667;
        lVar280 = lVar280 + 4;
        outptr = pfVar1599;
      }
      return;
    }
    fVar666 = *ptr1;
    if (iVar276 == 4) {
      auVar681 = *(undefined1 (*) [16])ptr1;
      auVar1594 = ZEXT3264(CONCAT1616(auVar681,auVar681));
    }
    else {
      auVar681._4_4_ = fVar666;
      auVar681._0_4_ = fVar666;
      auVar681._8_4_ = fVar666;
      auVar681._12_4_ = fVar666;
      if (iVar276 == 8) {
        auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar801._4_4_ = fVar666;
        auVar801._0_4_ = fVar666;
        auVar801._8_4_ = fVar666;
        auVar801._12_4_ = fVar666;
        auVar801._16_4_ = fVar666;
        auVar801._20_4_ = fVar666;
        auVar801._24_4_ = fVar666;
        auVar801._28_4_ = fVar666;
        auVar1594 = ZEXT3264(auVar801);
        if (iVar276 == 0x10) {
          uVar1600 = auVar681._8_8_;
          auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          fVar667 = fVar666;
          fVar1604 = fVar666;
          goto LAB_00387009;
        }
      }
    }
    uVar1600 = auVar681._8_8_;
    auVar801 = auVar1594._0_32_;
    auVar1594 = vinserti64x4_avx512f(auVar1594,auVar801,1);
    fVar667 = auVar681._0_4_;
    fVar1604 = auVar681._4_4_;
LAB_00387009:
    auVar1595 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
    auVar632 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    auVar573 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
    auVar650 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
    auVar574 = vpxord_avx512f(auVar1595,auVar650);
    auVar575 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
    auVar576 = vpxord_avx512f(auVar575,auVar650);
    auVar650 = vpxord_avx512f(auVar573,auVar650);
    uVar282 = 0;
    auVar287 = vxorps_avx512vl(auVar287,auVar287);
    uVar279 = vcmpps_avx512f(auVar1594,ZEXT1664(auVar287),2);
    auVar1594 = vmaxps_avx512f(auVar1594,(undefined1  [64])_ps512_min_norm_pos);
    auVar577 = vmovdqa64_avx512f((undefined1  [64])_ps512_inv_mant_mask);
    auVar577 = vpternlogd_avx512f(auVar577,auVar1594,auVar1595,0xea);
    uVar283 = vcmpps_avx512f(auVar577,(undefined1  [64])_ps512_cephes_SQRTHF,1);
    auVar578 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
    for (; (int)uVar282 + 0xf < iVar277; uVar282 = uVar282 + 0x10) {
      auVar579 = vsubps_avx512f(auVar577,(undefined1  [64])afVar254);
      auVar580 = vaddps_avx512f(auVar579,auVar577);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar633._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar579._0_4_;
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar633._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar579._4_4_;
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar633._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar579._8_4_;
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar633._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar579._12_4_;
      bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
      auVar633._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar579._16_4_;
      bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
      auVar633._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar579._20_4_;
      bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
      auVar633._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar579._24_4_;
      bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
      auVar633._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar579._28_4_;
      bVar11 = (byte)(uVar283 >> 8);
      bVar281 = (bool)(bVar11 & 1);
      auVar633._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar579._32_4_;
      bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
      auVar633._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar579._36_4_;
      bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
      auVar633._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar579._40_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
      auVar633._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar579._44_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
      auVar633._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar579._48_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
      auVar633._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar579._52_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
      auVar633._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar579._56_4_;
      bVar281 = SUB81(uVar283 >> 0xf,0);
      auVar633._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar579._60_4_;
      auVar579 = vmulps_avx512f(auVar633,auVar633);
      auVar580 = vfmadd132ps_avx512f(auVar633,(undefined1  [64])afVar266,
                                     (undefined1  [64])_ps512_cephes_log_p0);
      auVar580 = vfmadd213ps_avx512f(auVar580,auVar633,(undefined1  [64])afVar267);
      auVar580 = vfmadd213ps_avx512f(auVar580,auVar633,(undefined1  [64])afVar268);
      auVar580 = vfmadd213ps_avx512f(auVar580,auVar633,(undefined1  [64])afVar269);
      auVar580 = vfmadd213ps_avx512f(auVar580,auVar633,(undefined1  [64])afVar270);
      auVar580 = vfmadd213ps_avx512f(auVar580,auVar633,(undefined1  [64])afVar271);
      auVar580 = vfmadd213ps_avx512f(auVar580,auVar633,(undefined1  [64])afVar272);
      auVar580 = vfmadd213ps_avx512f(auVar580,auVar633,(undefined1  [64])afVar273);
      auVar582 = vmulps_avx512f(auVar579,auVar633);
      auVar580 = vfmadd213ps_avx512f(auVar582,auVar580,auVar633);
      auVar582 = vpsrld_avx512f(auVar1594,0x17);
      auVar582 = vpsubd_avx512f(auVar582,auVar632);
      auVar582 = vcvtdq2ps_avx512f(auVar582);
      auVar581 = vaddps_avx512f(auVar582,(undefined1  [64])afVar254);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar634._0_4_ = (uint)bVar281 * auVar582._0_4_ | (uint)!bVar281 * auVar581._0_4_;
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar634._4_4_ = (uint)bVar281 * auVar582._4_4_ | (uint)!bVar281 * auVar581._4_4_;
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar634._8_4_ = (uint)bVar281 * auVar582._8_4_ | (uint)!bVar281 * auVar581._8_4_;
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar634._12_4_ = (uint)bVar281 * auVar582._12_4_ | (uint)!bVar281 * auVar581._12_4_;
      bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
      auVar634._16_4_ = (uint)bVar281 * auVar582._16_4_ | (uint)!bVar281 * auVar581._16_4_;
      bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
      auVar634._20_4_ = (uint)bVar281 * auVar582._20_4_ | (uint)!bVar281 * auVar581._20_4_;
      bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
      auVar634._24_4_ = (uint)bVar281 * auVar582._24_4_ | (uint)!bVar281 * auVar581._24_4_;
      bVar281 = (bool)((byte)(uVar283 >> 7) & 1);
      auVar634._28_4_ = (uint)bVar281 * auVar582._28_4_ | (uint)!bVar281 * auVar581._28_4_;
      bVar281 = (bool)(bVar11 & 1);
      auVar634._32_4_ = (uint)bVar281 * auVar582._32_4_ | (uint)!bVar281 * auVar581._32_4_;
      bVar281 = (bool)((byte)(uVar283 >> 9) & 1);
      auVar634._36_4_ = (uint)bVar281 * auVar582._36_4_ | (uint)!bVar281 * auVar581._36_4_;
      bVar281 = (bool)((byte)(uVar283 >> 10) & 1);
      auVar634._40_4_ = (uint)bVar281 * auVar582._40_4_ | (uint)!bVar281 * auVar581._40_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xb) & 1);
      auVar634._44_4_ = (uint)bVar281 * auVar582._44_4_ | (uint)!bVar281 * auVar581._44_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xc) & 1);
      auVar634._48_4_ = (uint)bVar281 * auVar582._48_4_ | (uint)!bVar281 * auVar581._48_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xd) & 1);
      auVar634._52_4_ = (uint)bVar281 * auVar582._52_4_ | (uint)!bVar281 * auVar581._52_4_;
      bVar281 = (bool)((byte)(uVar283 >> 0xe) & 1);
      auVar634._56_4_ = (uint)bVar281 * auVar582._56_4_ | (uint)!bVar281 * auVar581._56_4_;
      bVar281 = SUB81(uVar283 >> 0xf,0);
      auVar634._60_4_ = (uint)bVar281 * auVar582._60_4_ | (uint)!bVar281 * auVar581._60_4_;
      auVar580 = vfmadd231ps_avx512f(auVar580,auVar634,auVar573);
      auVar579 = vfmadd231ps_avx512f(auVar580,auVar574,auVar579);
      auVar579 = vfmadd231ps_avx512f(auVar579,auVar575,auVar634);
      bVar281 = (bool)((byte)uVar279 & 1);
      auVar635._0_4_ = (uint)bVar281 * auVar578._0_4_ | (uint)!bVar281 * auVar579._0_4_;
      bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
      auVar635._4_4_ = (uint)bVar281 * auVar578._4_4_ | (uint)!bVar281 * auVar579._4_4_;
      bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
      auVar635._8_4_ = (uint)bVar281 * auVar578._8_4_ | (uint)!bVar281 * auVar579._8_4_;
      bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
      auVar635._12_4_ = (uint)bVar281 * auVar578._12_4_ | (uint)!bVar281 * auVar579._12_4_;
      bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
      auVar635._16_4_ = (uint)bVar281 * auVar578._16_4_ | (uint)!bVar281 * auVar579._16_4_;
      bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
      auVar635._20_4_ = (uint)bVar281 * auVar578._20_4_ | (uint)!bVar281 * auVar579._20_4_;
      bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
      auVar635._24_4_ = (uint)bVar281 * auVar578._24_4_ | (uint)!bVar281 * auVar579._24_4_;
      bVar281 = (bool)((byte)(uVar279 >> 7) & 1);
      auVar635._28_4_ = (uint)bVar281 * auVar578._28_4_ | (uint)!bVar281 * auVar579._28_4_;
      bVar281 = (bool)((byte)(uVar279 >> 8) & 1);
      auVar635._32_4_ = (uint)bVar281 * auVar578._32_4_ | (uint)!bVar281 * auVar579._32_4_;
      bVar281 = (bool)((byte)(uVar279 >> 9) & 1);
      auVar635._36_4_ = (uint)bVar281 * auVar578._36_4_ | (uint)!bVar281 * auVar579._36_4_;
      bVar281 = (bool)((byte)(uVar279 >> 10) & 1);
      auVar635._40_4_ = (uint)bVar281 * auVar578._40_4_ | (uint)!bVar281 * auVar579._40_4_;
      bVar281 = (bool)((byte)(uVar279 >> 0xb) & 1);
      auVar635._44_4_ = (uint)bVar281 * auVar578._44_4_ | (uint)!bVar281 * auVar579._44_4_;
      bVar281 = (bool)((byte)(uVar279 >> 0xc) & 1);
      auVar635._48_4_ = (uint)bVar281 * auVar578._48_4_ | (uint)!bVar281 * auVar579._48_4_;
      bVar281 = (bool)((byte)(uVar279 >> 0xd) & 1);
      auVar635._52_4_ = (uint)bVar281 * auVar578._52_4_ | (uint)!bVar281 * auVar579._52_4_;
      bVar281 = (bool)((byte)(uVar279 >> 0xe) & 1);
      auVar635._56_4_ = (uint)bVar281 * auVar578._56_4_ | (uint)!bVar281 * auVar579._56_4_;
      bVar281 = SUB81(uVar279 >> 0xf,0);
      auVar635._60_4_ = (uint)bVar281 * auVar578._60_4_ | (uint)!bVar281 * auVar579._60_4_;
      auVar579 = vmulps_avx512f(auVar635,*(undefined1 (*) [64])(ptr + uVar282));
      auVar579 = vminps_avx512f(auVar579,(undefined1  [64])afVar255);
      auVar579 = vmaxps_avx512f(auVar579,(undefined1  [64])afVar256);
      auVar580 = vfmadd213ps_avx512f((undefined1  [64])afVar257,auVar579,auVar1595);
      auVar582 = vrndscaleps_avx512f(auVar580,1);
      uVar284 = vcmpps_avx512f(auVar580,auVar582,1);
      auVar580 = vsubps_avx512f(auVar582,(undefined1  [64])afVar254);
      bVar281 = (bool)((byte)uVar284 & 1);
      auVar636._0_4_ = (uint)bVar281 * auVar580._0_4_ | (uint)!bVar281 * auVar582._0_4_;
      bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
      auVar636._4_4_ = (uint)bVar281 * auVar580._4_4_ | (uint)!bVar281 * auVar582._4_4_;
      bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
      auVar636._8_4_ = (uint)bVar281 * auVar580._8_4_ | (uint)!bVar281 * auVar582._8_4_;
      bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
      auVar636._12_4_ = (uint)bVar281 * auVar580._12_4_ | (uint)!bVar281 * auVar582._12_4_;
      bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
      auVar636._16_4_ = (uint)bVar281 * auVar580._16_4_ | (uint)!bVar281 * auVar582._16_4_;
      bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
      auVar636._20_4_ = (uint)bVar281 * auVar580._20_4_ | (uint)!bVar281 * auVar582._20_4_;
      bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
      auVar636._24_4_ = (uint)bVar281 * auVar580._24_4_ | (uint)!bVar281 * auVar582._24_4_;
      bVar281 = (bool)((byte)(uVar284 >> 7) & 1);
      auVar636._28_4_ = (uint)bVar281 * auVar580._28_4_ | (uint)!bVar281 * auVar582._28_4_;
      bVar281 = (bool)((byte)(uVar284 >> 8) & 1);
      auVar636._32_4_ = (uint)bVar281 * auVar580._32_4_ | (uint)!bVar281 * auVar582._32_4_;
      bVar281 = (bool)((byte)(uVar284 >> 9) & 1);
      auVar636._36_4_ = (uint)bVar281 * auVar580._36_4_ | (uint)!bVar281 * auVar582._36_4_;
      bVar281 = (bool)((byte)(uVar284 >> 10) & 1);
      auVar636._40_4_ = (uint)bVar281 * auVar580._40_4_ | (uint)!bVar281 * auVar582._40_4_;
      bVar281 = (bool)((byte)(uVar284 >> 0xb) & 1);
      auVar636._44_4_ = (uint)bVar281 * auVar580._44_4_ | (uint)!bVar281 * auVar582._44_4_;
      bVar281 = (bool)((byte)(uVar284 >> 0xc) & 1);
      auVar636._48_4_ = (uint)bVar281 * auVar580._48_4_ | (uint)!bVar281 * auVar582._48_4_;
      bVar281 = (bool)((byte)(uVar284 >> 0xd) & 1);
      auVar636._52_4_ = (uint)bVar281 * auVar580._52_4_ | (uint)!bVar281 * auVar582._52_4_;
      bVar281 = (bool)((byte)(uVar284 >> 0xe) & 1);
      auVar636._56_4_ = (uint)bVar281 * auVar580._56_4_ | (uint)!bVar281 * auVar582._56_4_;
      bVar281 = SUB81(uVar284 >> 0xf,0);
      auVar636._60_4_ = (uint)bVar281 * auVar580._60_4_ | (uint)!bVar281 * auVar582._60_4_;
      auVar579 = vfmadd231ps_avx512f(auVar579,auVar636,auVar576);
      auVar579 = vfmadd231ps_avx512f(auVar579,auVar636,auVar650);
      auVar580 = vmulps_avx512f(auVar579,auVar579);
      auVar582 = vfmadd213ps_avx512f(auVar579,(undefined1  [64])afVar258,(undefined1  [64])afVar259)
      ;
      auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar260);
      auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar261);
      auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,(undefined1  [64])afVar262);
      auVar582 = vfmadd213ps_avx512f(auVar582,auVar579,auVar1595);
      auVar579 = vfmadd213ps_avx512f(auVar582,auVar580,auVar579);
      auVar579 = vaddps_avx512f(auVar579,(undefined1  [64])afVar254);
      auVar580 = vcvttps2dq_avx512f(auVar636);
      auVar580 = vpaddd_avx512f(auVar580,auVar632);
      auVar580 = vpslld_avx512f(auVar580,0x17);
      auVar579 = vmulps_avx512f(auVar579,auVar580);
      *(undefined1 (*) [64])(outptr + uVar282) = auVar579;
    }
    auVar287 = ZEXT816(0) << 0x40;
    auVar1061._8_4_ = 0xffffff82;
    auVar1061._0_8_ = 0xffffff82ffffff82;
    auVar1061._12_4_ = 0xffffff82;
    auVar1061._16_4_ = 0xffffff82;
    auVar1061._20_4_ = 0xffffff82;
    auVar1061._24_4_ = 0xffffff82;
    auVar1061._28_4_ = 0xffffff82;
    auVar1114._8_4_ = 0x3f3504f3;
    auVar1114._0_8_ = 0x3f3504f33f3504f3;
    auVar1114._12_4_ = 0x3f3504f3;
    auVar1114._16_4_ = 0x3f3504f3;
    auVar1114._20_4_ = 0x3f3504f3;
    auVar1114._24_4_ = 0x3f3504f3;
    auVar1114._28_4_ = 0x3f3504f3;
    auVar1161._8_4_ = 0xbf800000;
    auVar1161._0_8_ = 0xbf800000bf800000;
    auVar1161._12_4_ = 0xbf800000;
    auVar1161._16_4_ = 0xbf800000;
    auVar1161._20_4_ = 0xbf800000;
    auVar1161._24_4_ = 0xbf800000;
    auVar1161._28_4_ = 0xbf800000;
    auVar1212._8_4_ = 0x3f800000;
    auVar1212._0_8_ = 0x3f8000003f800000;
    auVar1212._12_4_ = 0x3f800000;
    auVar1212._16_4_ = 0x3f800000;
    auVar1212._20_4_ = 0x3f800000;
    auVar1212._24_4_ = 0x3f800000;
    auVar1212._28_4_ = 0x3f800000;
    auVar945._8_4_ = 0x3d9021bb;
    auVar945._0_8_ = 0x3d9021bb3d9021bb;
    auVar945._12_4_ = 0x3d9021bb;
    auVar945._16_4_ = 0x3d9021bb;
    auVar945._20_4_ = 0x3d9021bb;
    auVar945._24_4_ = 0x3d9021bb;
    auVar945._28_4_ = 0x3d9021bb;
    auVar1312._8_4_ = 0xbdebd1b8;
    auVar1312._0_8_ = 0xbdebd1b8bdebd1b8;
    auVar1312._12_4_ = 0xbdebd1b8;
    auVar1312._16_4_ = 0xbdebd1b8;
    auVar1312._20_4_ = 0xbdebd1b8;
    auVar1312._24_4_ = 0xbdebd1b8;
    auVar1312._28_4_ = 0xbdebd1b8;
    auVar1366._8_4_ = 0x3def251a;
    auVar1366._0_8_ = 0x3def251a3def251a;
    auVar1366._12_4_ = 0x3def251a;
    auVar1366._16_4_ = 0x3def251a;
    auVar1366._20_4_ = 0x3def251a;
    auVar1366._24_4_ = 0x3def251a;
    auVar1366._28_4_ = 0x3def251a;
    auVar1420._8_4_ = 0xbdfe5d4f;
    auVar1420._0_8_ = 0xbdfe5d4fbdfe5d4f;
    auVar1420._12_4_ = 0xbdfe5d4f;
    auVar1420._16_4_ = 0xbdfe5d4f;
    auVar1420._20_4_ = 0xbdfe5d4f;
    auVar1420._24_4_ = 0xbdfe5d4f;
    auVar1420._28_4_ = 0xbdfe5d4f;
    auVar1474._8_4_ = 0x3e11e9bf;
    auVar1474._0_8_ = 0x3e11e9bf3e11e9bf;
    auVar1474._12_4_ = 0x3e11e9bf;
    auVar1474._16_4_ = 0x3e11e9bf;
    auVar1474._20_4_ = 0x3e11e9bf;
    auVar1474._24_4_ = 0x3e11e9bf;
    auVar1474._28_4_ = 0x3e11e9bf;
    auVar1527._8_4_ = 0xbe2aae50;
    auVar1527._0_8_ = 0xbe2aae50be2aae50;
    auVar1527._12_4_ = 0xbe2aae50;
    auVar1527._16_4_ = 0xbe2aae50;
    auVar1527._20_4_ = 0xbe2aae50;
    auVar1527._24_4_ = 0xbe2aae50;
    auVar1527._28_4_ = 0xbe2aae50;
    auVar1580._8_4_ = 0x3e4cceac;
    auVar1580._0_8_ = 0x3e4cceac3e4cceac;
    auVar1580._12_4_ = 0x3e4cceac;
    auVar1580._16_4_ = 0x3e4cceac;
    auVar1580._20_4_ = 0x3e4cceac;
    auVar1580._24_4_ = 0x3e4cceac;
    auVar1580._28_4_ = 0x3e4cceac;
    auVar495 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
    auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar558 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
    auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar711._8_4_ = 0x3f318000;
    auVar711._0_8_ = 0x3f3180003f318000;
    auVar711._12_4_ = 0x3f318000;
    auVar711._16_4_ = 0x3f318000;
    auVar711._20_4_ = 0x3f318000;
    auVar711._24_4_ = 0x3f318000;
    auVar711._28_4_ = 0x3f318000;
    uVar279 = vcmpps_avx512vl(auVar801,ZEXT1632(auVar287),2);
    auVar411 = vpcmpeqd_avx2(ZEXT1632(auVar287),ZEXT1632(auVar287));
    auVar499 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar502 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar503 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar504 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar420 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar421 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
    auVar422 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
    auVar423 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
    auVar424 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
    for (; (int)uVar282 + 7 < iVar277; uVar282 = uVar282 + 8) {
      auVar131._8_4_ = 0x800000;
      auVar131._0_8_ = 0x80000000800000;
      auVar131._12_4_ = 0x800000;
      auVar131._16_4_ = 0x800000;
      auVar131._20_4_ = 0x800000;
      auVar131._24_4_ = 0x800000;
      auVar131._28_4_ = 0x800000;
      auVar425 = vmaxps_avx512vl(auVar801,auVar131);
      auVar418 = vpsrld_avx512vl(auVar425,0x17);
      auVar1003._8_4_ = 0x807fffff;
      auVar1003._0_8_ = 0x807fffff807fffff;
      auVar1003._12_4_ = 0x807fffff;
      auVar1003._16_4_ = 0x807fffff;
      auVar1003._20_4_ = 0x807fffff;
      auVar1003._24_4_ = 0x807fffff;
      auVar1003._28_4_ = 0x807fffff;
      auVar132._8_4_ = 0x3f000000;
      auVar132._0_8_ = 0x3f0000003f000000;
      auVar132._12_4_ = 0x3f000000;
      auVar132._16_4_ = 0x3f000000;
      auVar132._20_4_ = 0x3f000000;
      auVar132._24_4_ = 0x3f000000;
      auVar132._28_4_ = 0x3f000000;
      auVar425 = vpternlogd_avx512vl(auVar425,auVar1003,auVar132,0xea);
      uVar283 = vcmpps_avx512vl(auVar425,auVar1114,1);
      auVar427 = vaddps_avx512vl(auVar425,auVar1161);
      auVar425 = vaddps_avx512vl(auVar427,auVar425);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar506._0_4_ = (uint)bVar281 * auVar425._0_4_ | (uint)!bVar281 * auVar427._0_4_;
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar506._4_4_ = (uint)bVar281 * auVar425._4_4_ | (uint)!bVar281 * auVar427._4_4_;
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar506._8_4_ = (uint)bVar281 * auVar425._8_4_ | (uint)!bVar281 * auVar427._8_4_;
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar506._12_4_ = (uint)bVar281 * auVar425._12_4_ | (uint)!bVar281 * auVar427._12_4_;
      bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
      auVar506._16_4_ = (uint)bVar281 * auVar425._16_4_ | (uint)!bVar281 * auVar427._16_4_;
      bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
      auVar506._20_4_ = (uint)bVar281 * auVar425._20_4_ | (uint)!bVar281 * auVar427._20_4_;
      bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
      auVar506._24_4_ = (uint)bVar281 * auVar425._24_4_ | (uint)!bVar281 * auVar427._24_4_;
      bVar281 = SUB81(uVar283 >> 7,0);
      auVar506._28_4_ = (uint)bVar281 * auVar425._28_4_ | (uint)!bVar281 * auVar427._28_4_;
      auVar427 = vmulps_avx512vl(auVar506,auVar506);
      auVar425 = vfmadd213ps_avx512vl(auVar945,auVar506,auVar1312);
      auVar425 = vfmadd213ps_avx512vl(auVar425,auVar506,auVar1366);
      auVar425 = vfmadd213ps_avx512vl(auVar425,auVar506,auVar1420);
      auVar425 = vfmadd213ps_avx512vl(auVar425,auVar506,auVar1474);
      auVar425 = vfmadd213ps_avx512vl(auVar425,auVar506,auVar1527);
      auVar425 = vfmadd213ps_avx512vl(auVar425,auVar506,auVar1580);
      auVar425 = vfmadd213ps_avx512vl(auVar425,auVar506,auVar495);
      auVar425 = vfmadd213ps_avx512vl(auVar425,auVar506,auVar444);
      auVar412 = vmulps_avx512vl(auVar427,auVar506);
      auVar208._4_4_ = auVar425._4_4_ * auVar412._4_4_;
      auVar208._0_4_ = auVar425._0_4_ * auVar412._0_4_;
      auVar208._8_4_ = auVar425._8_4_ * auVar412._8_4_;
      auVar208._12_4_ = auVar425._12_4_ * auVar412._12_4_;
      auVar208._16_4_ = auVar425._16_4_ * auVar412._16_4_;
      auVar208._20_4_ = auVar425._20_4_ * auVar412._20_4_;
      auVar208._24_4_ = auVar425._24_4_ * auVar412._24_4_;
      auVar208._28_4_ = auVar412._28_4_;
      auVar425 = vpaddd_avx512vl(auVar418,auVar1061);
      auVar425 = vcvtdq2ps_avx(auVar425);
      auVar418 = vsubps_avx512vl(auVar425,auVar1212);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar507._0_4_ = (uint)bVar281 * auVar418._0_4_ | (uint)!bVar281 * auVar425._0_4_;
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar507._4_4_ = (uint)bVar281 * auVar418._4_4_ | (uint)!bVar281 * auVar425._4_4_;
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar507._8_4_ = (uint)bVar281 * auVar418._8_4_ | (uint)!bVar281 * auVar425._8_4_;
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar507._12_4_ = (uint)bVar281 * auVar418._12_4_ | (uint)!bVar281 * auVar425._12_4_;
      bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
      auVar507._16_4_ = (uint)bVar281 * auVar418._16_4_ | (uint)!bVar281 * auVar425._16_4_;
      bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
      auVar507._20_4_ = (uint)bVar281 * auVar418._20_4_ | (uint)!bVar281 * auVar425._20_4_;
      bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
      auVar507._24_4_ = (uint)bVar281 * auVar418._24_4_ | (uint)!bVar281 * auVar425._24_4_;
      bVar281 = SUB81(uVar283 >> 7,0);
      auVar507._28_4_ = (uint)bVar281 * auVar418._28_4_ | (uint)!bVar281 * auVar425._28_4_;
      auVar425 = vfmadd231ps_avx512vl(auVar208,auVar507,auVar558);
      auVar425 = vfmsub231ps_avx512vl(auVar425,auVar498,auVar427);
      auVar425 = vsubps_avx512vl(auVar425,auVar506);
      auVar287 = vfmsub231ps_fma(auVar425,auVar711,auVar507);
      bVar281 = (bool)((byte)uVar279 & 1);
      bVar12 = (bool)((byte)(uVar279 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar279 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar279 >> 3) & 1);
      pfVar1599 = ptr + uVar282;
      auVar209._4_4_ =
           (float)((uint)bVar12 * auVar411._4_4_ | (uint)!bVar12 * auVar287._4_4_) * pfVar1599[1];
      auVar209._0_4_ =
           (float)((uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * auVar287._0_4_) * *pfVar1599;
      auVar209._8_4_ =
           (float)((uint)bVar13 * auVar411._8_4_ | (uint)!bVar13 * auVar287._8_4_) * pfVar1599[2];
      auVar209._12_4_ =
           (float)((uint)bVar14 * auVar411._12_4_ | (uint)!bVar14 * auVar287._12_4_) * pfVar1599[3];
      auVar209._16_4_ = (float)((uint)((byte)(uVar279 >> 4) & 1) * auVar411._16_4_) * pfVar1599[4];
      auVar209._20_4_ = (float)((uint)((byte)(uVar279 >> 5) & 1) * auVar411._20_4_) * pfVar1599[5];
      auVar209._24_4_ = (float)((uint)((byte)(uVar279 >> 6) & 1) * auVar411._24_4_) * pfVar1599[6];
      auVar209._28_4_ = (uint)(byte)(uVar279 >> 7) * auVar411._28_4_;
      auVar425 = vminps_avx512vl(auVar209,auVar499);
      auVar425 = vmaxps_avx512vl(auVar425,auVar502);
      auVar418 = vfmadd231ps_avx512vl(auVar498,auVar425,auVar503);
      auVar427 = vrndscaleps_avx512vl(auVar418,1);
      uVar283 = vcmpps_avx512vl(auVar418,auVar427,1);
      auVar412 = vsubps_avx512vl(auVar427,auVar1212);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar508._0_4_ = (uint)bVar281 * auVar412._0_4_ | (uint)!bVar281 * auVar427._0_4_;
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar508._4_4_ = (uint)bVar281 * auVar412._4_4_ | (uint)!bVar281 * auVar427._4_4_;
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar508._8_4_ = (uint)bVar281 * auVar412._8_4_ | (uint)!bVar281 * auVar427._8_4_;
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar508._12_4_ = (uint)bVar281 * auVar412._12_4_ | (uint)!bVar281 * auVar427._12_4_;
      bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
      auVar508._16_4_ = (uint)bVar281 * auVar412._16_4_ | (uint)!bVar281 * auVar427._16_4_;
      bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
      auVar508._20_4_ = (uint)bVar281 * auVar412._20_4_ | (uint)!bVar281 * auVar427._20_4_;
      bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
      auVar508._24_4_ = (uint)bVar281 * auVar412._24_4_ | (uint)!bVar281 * auVar427._24_4_;
      bVar281 = SUB81(uVar283 >> 7,0);
      auVar508._28_4_ = (uint)bVar281 * auVar412._28_4_ | (uint)!bVar281 * auVar427._28_4_;
      auVar425 = vfmsub231ps_avx512vl(auVar425,auVar508,auVar711);
      auVar425 = vfnmsub231ps_avx512vl(auVar425,auVar508,auVar558);
      auVar210._4_4_ = auVar425._4_4_ * auVar425._4_4_;
      auVar210._0_4_ = auVar425._0_4_ * auVar425._0_4_;
      auVar210._8_4_ = auVar425._8_4_ * auVar425._8_4_;
      auVar210._12_4_ = auVar425._12_4_ * auVar425._12_4_;
      auVar210._16_4_ = auVar425._16_4_ * auVar425._16_4_;
      auVar210._20_4_ = auVar425._20_4_ * auVar425._20_4_;
      auVar210._24_4_ = auVar425._24_4_ * auVar425._24_4_;
      auVar210._28_4_ = auVar418._28_4_;
      auVar418 = vfmadd213ps_avx512vl(auVar504,auVar425,auVar420);
      auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar421);
      auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar422);
      auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar423);
      auVar418 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar498);
      auVar425 = vfmadd213ps_avx512vl(auVar418,auVar210,auVar425);
      auVar418 = vcvttps2dq_avx512vl(auVar508);
      auVar418 = vpslld_avx2(auVar418,0x17);
      auVar418 = vpaddd_avx512vl(auVar418,auVar424);
      auVar425 = vfmadd213ps_avx512vl(auVar418,auVar425,auVar418);
      *(undefined1 (*) [32])(outptr + uVar282) = auVar425;
    }
    auVar287 = ZEXT816(0) << 0x20;
    auVar921._8_4_ = 0x807fffff;
    auVar921._0_8_ = 0x807fffff807fffff;
    auVar921._12_4_ = 0x807fffff;
    auVar976._8_4_ = 0xffffff82;
    auVar976._0_8_ = 0xffffff82ffffff82;
    auVar976._12_4_ = 0xffffff82;
    auVar1032._8_4_ = 0x3f3504f3;
    auVar1032._0_8_ = 0x3f3504f33f3504f3;
    auVar1032._12_4_ = 0x3f3504f3;
    auVar1087._8_4_ = 0xbf800000;
    auVar1087._0_8_ = 0xbf800000bf800000;
    auVar1087._12_4_ = 0xbf800000;
    auVar1140._8_4_ = 0x3f800000;
    auVar1140._0_8_ = 0x3f8000003f800000;
    auVar1140._12_4_ = 0x3f800000;
    auVar751._8_4_ = 0x3d9021bb;
    auVar751._0_8_ = 0x3d9021bb3d9021bb;
    auVar751._12_4_ = 0x3d9021bb;
    auVar1237._8_4_ = 0xbdebd1b8;
    auVar1237._0_8_ = 0xbdebd1b8bdebd1b8;
    auVar1237._12_4_ = 0xbdebd1b8;
    auVar1285._8_4_ = 0x3def251a;
    auVar1285._0_8_ = 0x3def251a3def251a;
    auVar1285._12_4_ = 0x3def251a;
    auVar1339._8_4_ = 0xbdfe5d4f;
    auVar1339._0_8_ = 0xbdfe5d4fbdfe5d4f;
    auVar1339._12_4_ = 0xbdfe5d4f;
    auVar1393._8_4_ = 0x3e11e9bf;
    auVar1393._0_8_ = 0x3e11e9bf3e11e9bf;
    auVar1393._12_4_ = 0x3e11e9bf;
    auVar1447._8_4_ = 0xbe2aae50;
    auVar1447._0_8_ = 0xbe2aae50be2aae50;
    auVar1447._12_4_ = 0xbe2aae50;
    auVar1500._8_4_ = 0x3e4cceac;
    auVar1500._0_8_ = 0x3e4cceac3e4cceac;
    auVar1500._12_4_ = 0x3e4cceac;
    auVar1553._8_4_ = 0xbe7ffffc;
    auVar1553._0_8_ = 0xbe7ffffcbe7ffffc;
    auVar1553._12_4_ = 0xbe7ffffc;
    auVar350 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar351 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
    auVar354 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar355 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
    auVar248._4_4_ = fVar1604;
    auVar248._0_4_ = fVar667;
    auVar248._8_8_ = uVar1600;
    uVar279 = vcmpps_avx512vl(auVar287,auVar248,0xd);
    auVar287 = vpcmpeqd_avx(auVar287,auVar287);
    auVar356 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar359 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar395 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar396 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar296 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
    auVar297 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
    auVar298 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
    auVar299 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
    for (; (int)uVar282 + 3 < iVar277; uVar282 = uVar282 + 4) {
      auVar830._8_4_ = 0x800000;
      auVar830._0_8_ = 0x80000000800000;
      auVar830._12_4_ = 0x800000;
      auVar249._4_4_ = fVar1604;
      auVar249._0_4_ = fVar667;
      auVar249._8_8_ = uVar1600;
      auVar300 = vmaxps_avx512vl(auVar830,auVar249);
      auVar301 = vpsrld_avx512vl(auVar300,0x17);
      auVar63._8_4_ = 0x3f000000;
      auVar63._0_8_ = 0x3f0000003f000000;
      auVar63._12_4_ = 0x3f000000;
      auVar300 = vpternlogd_avx512vl(auVar300,auVar921,auVar63,0xea);
      uVar283 = vcmpps_avx512vl(auVar300,auVar1032,1);
      auVar294 = vaddps_avx512vl(auVar300,auVar1087);
      auVar300 = vaddps_avx512vl(auVar294,auVar300);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar362._0_4_ = (uint)bVar281 * auVar300._0_4_ | (uint)!bVar281 * auVar294._0_4_;
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar362._4_4_ = (uint)bVar281 * auVar300._4_4_ | (uint)!bVar281 * auVar294._4_4_;
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar362._8_4_ = (uint)bVar281 * auVar300._8_4_ | (uint)!bVar281 * auVar294._8_4_;
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar362._12_4_ = (uint)bVar281 * auVar300._12_4_ | (uint)!bVar281 * auVar294._12_4_;
      auVar294 = vmulps_avx512vl(auVar362,auVar362);
      auVar300 = vfmadd213ps_avx512vl(auVar751,auVar362,auVar1237);
      auVar300 = vfmadd213ps_avx512vl(auVar300,auVar362,auVar1285);
      auVar300 = vfmadd213ps_avx512vl(auVar300,auVar362,auVar1339);
      auVar300 = vfmadd213ps_avx512vl(auVar300,auVar362,auVar1393);
      auVar300 = vfmadd213ps_avx512vl(auVar300,auVar362,auVar1447);
      auVar300 = vfmadd213ps_avx512vl(auVar300,auVar362,auVar1500);
      auVar300 = vfmadd213ps_avx512vl(auVar300,auVar362,auVar1553);
      auVar300 = vfmadd213ps_avx512vl(auVar300,auVar362,auVar350);
      auVar303 = vmulps_avx512vl(auVar294,auVar362);
      auVar831._0_4_ = auVar300._0_4_ * auVar303._0_4_;
      auVar831._4_4_ = auVar300._4_4_ * auVar303._4_4_;
      auVar831._8_4_ = auVar300._8_4_ * auVar303._8_4_;
      auVar831._12_4_ = auVar300._12_4_ * auVar303._12_4_;
      auVar300 = vpaddd_avx512vl(auVar301,auVar976);
      auVar300 = vcvtdq2ps_avx(auVar300);
      auVar301 = vsubps_avx512vl(auVar300,auVar1140);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar363._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar300._0_4_;
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar363._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar300._4_4_;
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar363._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar300._8_4_;
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar363._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar300._12_4_;
      auVar300 = vfmadd231ps_avx512vl(auVar831,auVar363,auVar351);
      auVar300 = vfmsub231ps_avx512vl(auVar300,auVar354,auVar294);
      auVar300 = vsubps_avx512vl(auVar300,auVar362);
      auVar300 = vfmsub231ps_avx512vl(auVar300,auVar355,auVar363);
      bVar281 = (bool)((byte)uVar279 & 1);
      bVar12 = (bool)((byte)(uVar279 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar279 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar279 >> 3) & 1);
      pfVar1599 = ptr + uVar282;
      auVar832._0_4_ =
           (float)((uint)bVar281 * auVar287._0_4_ | (uint)!bVar281 * auVar300._0_4_) * *pfVar1599;
      auVar832._4_4_ =
           (float)((uint)bVar12 * auVar287._4_4_ | (uint)!bVar12 * auVar300._4_4_) * pfVar1599[1];
      auVar832._8_4_ =
           (float)((uint)bVar13 * auVar287._8_4_ | (uint)!bVar13 * auVar300._8_4_) * pfVar1599[2];
      auVar832._12_4_ =
           (float)((uint)bVar14 * auVar287._12_4_ | (uint)!bVar14 * auVar300._12_4_) * pfVar1599[3];
      auVar300 = vminps_avx512vl(auVar832,auVar356);
      auVar300 = vmaxps_avx512vl(auVar300,auVar359);
      auVar301 = vfmadd231ps_avx512vl(auVar354,auVar300,auVar360);
      auVar294 = vcvttps2dq_avx512vl(auVar301);
      auVar294 = vcvtdq2ps_avx512vl(auVar294);
      uVar283 = vcmpps_avx512vl(auVar301,auVar294,1);
      auVar301 = vsubps_avx512vl(auVar294,auVar1140);
      bVar281 = (bool)((byte)uVar283 & 1);
      auVar364._0_4_ = (uint)bVar281 * auVar301._0_4_ | (uint)!bVar281 * auVar294._0_4_;
      bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
      auVar364._4_4_ = (uint)bVar281 * auVar301._4_4_ | (uint)!bVar281 * auVar294._4_4_;
      bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
      auVar364._8_4_ = (uint)bVar281 * auVar301._8_4_ | (uint)!bVar281 * auVar294._8_4_;
      bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar364._12_4_ = (uint)bVar281 * auVar301._12_4_ | (uint)!bVar281 * auVar294._12_4_;
      auVar300 = vfmsub231ps_avx512vl(auVar300,auVar364,auVar355);
      auVar300 = vfnmsub231ps_avx512vl(auVar300,auVar364,auVar351);
      auVar1187._0_4_ = auVar300._0_4_ * auVar300._0_4_;
      auVar1187._4_4_ = auVar300._4_4_ * auVar300._4_4_;
      auVar1187._8_4_ = auVar300._8_4_ * auVar300._8_4_;
      auVar1187._12_4_ = auVar300._12_4_ * auVar300._12_4_;
      auVar301 = vfmadd213ps_avx512vl(auVar395,auVar300,auVar396);
      auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar296);
      auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar297);
      auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar298);
      auVar301 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar354);
      auVar300 = vfmadd213ps_avx512vl(auVar301,auVar1187,auVar300);
      auVar301 = vcvttps2dq_avx512vl(auVar364);
      auVar301 = vpslld_avx(auVar301,0x17);
      auVar301 = vpaddd_avx512vl(auVar301,auVar299);
      auVar300 = vfmadd213ps_avx512vl(auVar301,auVar300,auVar301);
      *(undefined1 (*) [16])(outptr + uVar282) = auVar300;
    }
    lVar280 = 0;
    for (uVar279 = uVar282 & 0xffffffff; (int)uVar279 < iVar277; uVar279 = (ulong)((int)uVar279 + 1)
        ) {
      pfVar1599 = outptr;
      fVar667 = powf(fVar666,*(float *)((long)ptr + uVar282 * 4 + lVar280));
      *(float *)((long)outptr + uVar282 * 4 + lVar280) = fVar667;
      lVar280 = lVar280 + 4;
      outptr = pfVar1599;
    }
    return;
  case 10:
    iVar278 = bw;
    if (bw < aw) {
      iVar278 = aw;
    }
    iVar276 = bp;
    if (bp < ap) {
      iVar276 = ap;
    }
    iVar277 = iVar276 * iVar278;
    if (ap != bp) {
LAB_00382268:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        pfVar1599 = ptr1;
        if (iVar276 == 0x10) {
          iVar277 = 0;
          if (0 < iVar278) {
            iVar277 = iVar278;
          }
          while( true ) {
            bVar281 = iVar277 == 0;
            iVar277 = iVar277 + -1;
            if (bVar281) break;
            auVar1594 = *(undefined1 (*) [64])ptr;
            vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            y_03[1] = (float)in_stack_fffffffffffffe7c._0_4_;
            y_03[2] = (float)in_stack_fffffffffffffe7c._4_4_;
            y_03[3] = (float)in_stack_fffffffffffffe7c._8_4_;
            y_03[0] = (float)in_stack_fffffffffffffe78;
            y_03._16_8_ = outptr;
            y_03[6] = (float)(int)in_stack_fffffffffffffe90;
            y_03[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
            y_03[8] = (float)in_stack_fffffffffffffe98._0_4_;
            y_03[9] = (float)in_stack_fffffffffffffe98._4_4_;
            y_03[10] = (float)in_stack_fffffffffffffe98._8_4_;
            y_03[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
            y_03[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
            y_03[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
            y_03[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
            y_03[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
            x_03[4] = (float)(int)pfVar1599;
            x_03[0] = (float)in_stack_fffffffffffffeb8._0_4_;
            x_03[1] = (float)in_stack_fffffffffffffeb8._4_4_;
            x_03[2] = (float)in_stack_fffffffffffffeb8._8_4_;
            x_03[3] = (float)in_stack_fffffffffffffeb8._12_4_;
            x_03[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
            x_03[6] = (float)(int)in_stack_fffffffffffffed0;
            x_03[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
            x_03[8] = (float)(int)in_stack_fffffffffffffed8;
            x_03[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
            x_03[10] = (float)(int)in_stack_fffffffffffffee0;
            x_03[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
            x_03[0xc] = (float)(int)in_stack_fffffffffffffee8;
            x_03[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
            x_03[0xe] = (float)(int)in_stack_fffffffffffffef0;
            x_03[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
            atan2512_ps(__return_storage_ptr__,y_03,x_03);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
          }
        }
        pauVar1598 = (undefined1 (*) [64])outptr;
        if (iVar276 == 8) {
          iVar277 = 0;
          while( true ) {
            if (iVar278 <= iVar277 + 1) break;
            fVar666 = *ptr1;
            auVar1594 = *(undefined1 (*) [64])ptr;
            fVar667 = ptr1[1];
            auVar862._4_4_ = fVar667;
            auVar862._0_4_ = fVar667;
            auVar862._8_4_ = fVar667;
            auVar862._12_4_ = fVar667;
            auVar862._16_4_ = fVar667;
            auVar862._20_4_ = fVar667;
            auVar862._24_4_ = fVar667;
            auVar862._28_4_ = fVar667;
            vinsertf64x4_avx512f
                      (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,CONCAT416(
                                                  fVar666,CONCAT412(fVar666,CONCAT48(fVar666,
                                                  CONCAT44(fVar666,fVar666)))))))),auVar862,1);
            y_08[1] = (float)in_stack_fffffffffffffe7c._0_4_;
            y_08[2] = (float)in_stack_fffffffffffffe7c._4_4_;
            y_08[3] = (float)in_stack_fffffffffffffe7c._8_4_;
            y_08[0] = (float)in_stack_fffffffffffffe78;
            y_08._16_8_ = pauVar1598;
            y_08[6] = (float)(int)in_stack_fffffffffffffe90;
            y_08[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
            y_08[8] = (float)in_stack_fffffffffffffe98._0_4_;
            y_08[9] = (float)in_stack_fffffffffffffe98._4_4_;
            y_08[10] = (float)in_stack_fffffffffffffe98._8_4_;
            y_08[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
            y_08[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
            y_08[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
            y_08[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
            y_08[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
            x_08[4] = (float)(int)pfVar1599;
            x_08[0] = (float)in_stack_fffffffffffffeb8._0_4_;
            x_08[1] = (float)in_stack_fffffffffffffeb8._4_4_;
            x_08[2] = (float)in_stack_fffffffffffffeb8._8_4_;
            x_08[3] = (float)in_stack_fffffffffffffeb8._12_4_;
            x_08[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
            x_08[6] = (float)(int)in_stack_fffffffffffffed0;
            x_08[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
            x_08[8] = (float)(int)in_stack_fffffffffffffed8;
            x_08[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
            x_08[10] = (float)(int)in_stack_fffffffffffffee0;
            x_08[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
            x_08[0xc] = (float)(int)in_stack_fffffffffffffee8;
            x_08[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
            x_08[0xe] = (float)(int)in_stack_fffffffffffffef0;
            x_08[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
            atan2512_ps(__return_storage_ptr__,y_08,x_08);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar277 = iVar277 + 2;
          }
          auVar709._8_4_ = 0x80000000;
          auVar709._0_8_ = 0x8000000080000000;
          auVar709._12_4_ = 0x80000000;
          auVar709._16_4_ = 0x80000000;
          auVar709._20_4_ = 0x80000000;
          auVar709._24_4_ = 0x80000000;
          auVar709._28_4_ = 0x80000000;
          auVar793._8_4_ = 0x40490fdb;
          auVar793._0_8_ = 0x40490fdb40490fdb;
          auVar793._12_4_ = 0x40490fdb;
          auVar793._16_4_ = 0x40490fdb;
          auVar793._20_4_ = 0x40490fdb;
          auVar793._24_4_ = 0x40490fdb;
          auVar793._28_4_ = 0x40490fdb;
          auVar287 = ZEXT816(0) << 0x40;
          auVar1000._8_4_ = 0x7fffffff;
          auVar1000._0_8_ = 0x7fffffff7fffffff;
          auVar1000._12_4_ = 0x7fffffff;
          auVar1000._16_4_ = 0x7fffffff;
          auVar1000._20_4_ = 0x7fffffff;
          auVar1000._24_4_ = 0x7fffffff;
          auVar1000._28_4_ = 0x7fffffff;
          auVar1058._8_4_ = 0x3f800000;
          auVar1058._0_8_ = 0x3f8000003f800000;
          auVar1058._12_4_ = 0x3f800000;
          auVar1058._16_4_ = 0x3f800000;
          auVar1058._20_4_ = 0x3f800000;
          auVar1058._24_4_ = 0x3f800000;
          auVar1058._28_4_ = 0x3f800000;
          auVar1111._8_4_ = 0xbc83a25c;
          auVar1111._0_8_ = 0xbc83a25cbc83a25c;
          auVar1111._12_4_ = 0xbc83a25c;
          auVar1111._16_4_ = 0xbc83a25c;
          auVar1111._20_4_ = 0xbc83a25c;
          auVar1111._24_4_ = 0xbc83a25c;
          auVar1111._28_4_ = 0xbc83a25c;
          auVar1158._8_4_ = 0xbd99b01e;
          auVar1158._0_8_ = 0xbd99b01ebd99b01e;
          auVar1158._12_4_ = 0xbd99b01e;
          auVar1158._16_4_ = 0xbd99b01e;
          auVar1158._20_4_ = 0xbd99b01e;
          auVar1158._24_4_ = 0xbd99b01e;
          auVar1158._28_4_ = 0xbd99b01e;
          auVar1209._8_4_ = 0xbe117200;
          auVar1209._0_8_ = 0xbe117200be117200;
          auVar1209._12_4_ = 0xbe117200;
          auVar1209._16_4_ = 0xbe117200;
          auVar1209._20_4_ = 0xbe117200;
          auVar1209._24_4_ = 0xbe117200;
          auVar1209._28_4_ = 0xbe117200;
          auVar1261._8_4_ = 0xbeaaaa53;
          auVar1261._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1261._12_4_ = 0xbeaaaa53;
          auVar1261._16_4_ = 0xbeaaaa53;
          auVar1261._20_4_ = 0xbeaaaa53;
          auVar1261._24_4_ = 0xbeaaaa53;
          auVar1261._28_4_ = 0xbeaaaa53;
          auVar1309._8_4_ = 0x3b3ac537;
          auVar1309._0_8_ = 0x3b3ac5373b3ac537;
          auVar1309._12_4_ = 0x3b3ac537;
          auVar1309._16_4_ = 0x3b3ac537;
          auVar1309._20_4_ = 0x3b3ac537;
          auVar1309._24_4_ = 0x3b3ac537;
          auVar1309._28_4_ = 0x3b3ac537;
          auVar1363._8_4_ = 0x3d2edd4e;
          auVar1363._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1363._12_4_ = 0x3d2edd4e;
          auVar1363._16_4_ = 0x3d2edd4e;
          auVar1363._20_4_ = 0x3d2edd4e;
          auVar1363._24_4_ = 0x3d2edd4e;
          auVar1363._28_4_ = 0x3d2edd4e;
          auVar1417._8_4_ = 0x3dd9ed24;
          auVar1417._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1417._12_4_ = 0x3dd9ed24;
          auVar1417._16_4_ = 0x3dd9ed24;
          auVar1417._20_4_ = 0x3dd9ed24;
          auVar1417._24_4_ = 0x3dd9ed24;
          auVar1417._28_4_ = 0x3dd9ed24;
          auVar1471._8_4_ = 0x3e4cb974;
          auVar1471._0_8_ = 0x3e4cb9743e4cb974;
          auVar1471._12_4_ = 0x3e4cb974;
          auVar1471._16_4_ = 0x3e4cb974;
          auVar1471._20_4_ = 0x3e4cb974;
          auVar1471._24_4_ = 0x3e4cb974;
          auVar1471._28_4_ = 0x3e4cb974;
          auVar1524._8_4_ = 0x3fc90fdb;
          auVar1524._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1524._12_4_ = 0x3fc90fdb;
          auVar1524._16_4_ = 0x3fc90fdb;
          auVar1524._20_4_ = 0x3fc90fdb;
          auVar1524._24_4_ = 0x3fc90fdb;
          auVar1524._28_4_ = 0x3fc90fdb;
          auVar1577._8_4_ = 0x40490fdb;
          auVar1577._0_8_ = 0x40490fdb40490fdb;
          auVar1577._12_4_ = 0x40490fdb;
          auVar1577._16_4_ = 0x40490fdb;
          auVar1577._20_4_ = 0x40490fdb;
          auVar1577._24_4_ = 0x40490fdb;
          auVar1577._28_4_ = 0x40490fdb;
          auVar411 = vpbroadcastd_avx512vl(ZEXT416(0x3fc90fdb));
          for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
            auVar444 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar495 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
            uVar279 = vcmpps_avx512vl(auVar495,ZEXT1632(auVar287),4);
            uVar283 = vcmpps_avx512vl(auVar444,ZEXT1632(auVar287),4);
            uVar283 = uVar279 & uVar283;
            auVar504 = ZEXT1632(auVar287);
            uVar282 = vcmpps_avx512vl(auVar444,auVar504,1);
            uVar284 = vcmpps_avx512vl(auVar495,auVar504,1);
            auVar117._8_4_ = 0xc0490fdb;
            auVar117._0_8_ = 0xc0490fdbc0490fdb;
            auVar117._12_4_ = 0xc0490fdb;
            auVar117._16_4_ = 0xc0490fdb;
            auVar117._20_4_ = 0xc0490fdb;
            auVar117._24_4_ = 0xc0490fdb;
            auVar117._28_4_ = 0xc0490fdb;
            auVar558 = vblendmps_avx512vl(auVar793,auVar117);
            bVar281 = (bool)((byte)uVar284 & 1);
            auVar483._0_4_ = (uint)bVar281 * auVar558._0_4_ | (uint)!bVar281 * in_ZMM19._0_4_;
            bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
            auVar483._4_4_ = (uint)bVar281 * auVar558._4_4_ | (uint)!bVar281 * in_ZMM19._4_4_;
            bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
            auVar483._8_4_ = (uint)bVar281 * auVar558._8_4_ | (uint)!bVar281 * in_ZMM19._8_4_;
            bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
            auVar483._12_4_ = (uint)bVar281 * auVar558._12_4_ | (uint)!bVar281 * in_ZMM19._12_4_;
            bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
            auVar483._16_4_ = (uint)bVar281 * auVar558._16_4_ | (uint)!bVar281 * in_ZMM19._16_4_;
            bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
            auVar483._20_4_ = (uint)bVar281 * auVar558._20_4_ | (uint)!bVar281 * in_ZMM19._20_4_;
            bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
            auVar483._24_4_ = (uint)bVar281 * auVar558._24_4_ | (uint)!bVar281 * in_ZMM19._24_4_;
            bVar281 = SUB81(uVar284 >> 7,0);
            auVar483._28_4_ = (uint)bVar281 * auVar558._28_4_ | (uint)!bVar281 * in_ZMM19._28_4_;
            in_ZMM19 = ZEXT3264(auVar483);
            auVar350 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar444._0_16_);
            auVar558 = vbroadcastss_avx512vl(auVar350);
            auVar558 = vmulps_avx512vl(auVar495,auVar558);
            vandps_avx512vl(auVar558,auVar1000);
            uVar284 = vcmpps_avx512vl(auVar1058,auVar558,1);
            auVar118._8_4_ = 0xbf800000;
            auVar118._0_8_ = 0xbf800000bf800000;
            auVar118._12_4_ = 0xbf800000;
            auVar118._16_4_ = 0xbf800000;
            auVar118._20_4_ = 0xbf800000;
            auVar118._24_4_ = 0xbf800000;
            auVar118._28_4_ = 0xbf800000;
            auVar498 = vblendmps_avx512vl(auVar558,auVar118);
            bVar11 = (byte)uVar284;
            auVar484._0_4_ =
                 (uint)(bVar11 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM22._0_4_;
            bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
            auVar484._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * in_ZMM22._4_4_;
            bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
            auVar484._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * in_ZMM22._8_4_;
            bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
            auVar484._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * in_ZMM22._12_4_;
            bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
            auVar484._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * in_ZMM22._16_4_;
            bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
            auVar484._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * in_ZMM22._20_4_;
            bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
            auVar484._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * in_ZMM22._24_4_;
            bVar281 = SUB81(uVar284 >> 7,0);
            auVar484._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * in_ZMM22._28_4_;
            auVar498 = vdivps_avx512vl(auVar484,auVar558);
            auVar485._0_4_ =
                 (uint)(bVar11 & 1) * auVar498._0_4_ | !(bool)(bVar11 & 1) * auVar484._0_4_;
            bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
            auVar485._4_4_ = (uint)bVar281 * auVar498._4_4_ | !bVar281 * auVar484._4_4_;
            bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
            auVar485._8_4_ = (uint)bVar281 * auVar498._8_4_ | !bVar281 * auVar484._8_4_;
            bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
            auVar485._12_4_ = (uint)bVar281 * auVar498._12_4_ | !bVar281 * auVar484._12_4_;
            bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
            auVar485._16_4_ = (uint)bVar281 * auVar498._16_4_ | !bVar281 * auVar484._16_4_;
            bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
            auVar485._20_4_ = (uint)bVar281 * auVar498._20_4_ | !bVar281 * auVar484._20_4_;
            bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
            auVar485._24_4_ = (uint)bVar281 * auVar498._24_4_ | !bVar281 * auVar484._24_4_;
            bVar281 = SUB81(uVar284 >> 7,0);
            auVar485._28_4_ = (uint)bVar281 * auVar498._28_4_ | !bVar281 * auVar484._28_4_;
            in_ZMM22 = ZEXT3264(auVar485);
            auVar498 = vmulps_avx512vl(auVar485,auVar485);
            auVar499 = vmulps_avx512vl(auVar498,auVar498);
            auVar502 = vfmadd213ps_avx512vl(auVar1111,auVar499,auVar1158);
            auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1209);
            auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1261);
            auVar503 = vfmadd213ps_avx512vl(auVar1309,auVar499,auVar1363);
            auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1417);
            auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1471);
            auVar499 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1058);
            auVar498 = vfmadd231ps_avx512vl(auVar499,auVar498,auVar502);
            auVar498 = vmulps_avx512vl(auVar498,auVar485);
            auVar499 = vaddps_avx512vl(auVar498,auVar1524);
            auVar486._0_4_ =
                 (uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar498._0_4_;
            bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
            auVar486._4_4_ = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * auVar498._4_4_;
            bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
            auVar486._8_4_ = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * auVar498._8_4_;
            bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
            auVar486._12_4_ = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * auVar498._12_4_;
            bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
            auVar486._16_4_ = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * auVar498._16_4_;
            bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
            auVar486._20_4_ = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * auVar498._20_4_;
            bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
            auVar486._24_4_ = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * auVar498._24_4_;
            bVar281 = SUB81(uVar284 >> 7,0);
            auVar486._28_4_ = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * auVar498._28_4_;
            auVar558 = vpternlogd_avx512vl(auVar486,auVar558,auVar709,0xf8);
            auVar498 = vaddps_avx512vl(auVar558,auVar483);
            bVar281 = (bool)((byte)uVar282 & 1);
            uVar286 = (uint)bVar281 * auVar498._0_4_ | (uint)!bVar281 * auVar558._0_4_;
            bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
            uVar659 = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * auVar558._4_4_;
            bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
            uVar660 = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * auVar558._8_4_;
            bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
            uVar661 = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * auVar558._12_4_;
            bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
            uVar662 = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * auVar558._16_4_;
            bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
            uVar663 = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * auVar558._20_4_;
            bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
            uVar664 = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * auVar558._24_4_;
            bVar281 = SUB81(uVar282 >> 7,0);
            uVar665 = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * auVar558._28_4_;
            in_ZMM21 = ZEXT3264(CONCAT428(uVar665,CONCAT424(uVar664,CONCAT420(uVar663,CONCAT416(
                                                  uVar662,CONCAT412(uVar661,CONCAT48(uVar660,
                                                  CONCAT44(uVar659,uVar286))))))));
            auVar444 = vpternlogd_avx512vl(auVar444,auVar1577,auVar709,0xec);
            uVar1600 = vcmpps_avx512vl(auVar504,auVar444,2);
            bVar11 = ~((byte)uVar279 | (byte)uVar1600);
            auVar444 = vmovdqa32_avx512vl(auVar1577);
            iVar2 = (uint)(bVar11 & 1) * auVar444._0_4_;
            iVar6 = (uint)(bVar11 >> 1 & 1) * auVar444._4_4_;
            auVar487._4_4_ = iVar6;
            auVar487._0_4_ = iVar2;
            iVar3 = (uint)(bVar11 >> 2 & 1) * auVar444._8_4_;
            auVar487._8_4_ = iVar3;
            iVar1 = (uint)(bVar11 >> 3 & 1) * auVar444._12_4_;
            auVar487._12_4_ = iVar1;
            iVar4 = (uint)(bVar11 >> 4 & 1) * auVar444._16_4_;
            auVar487._16_4_ = iVar4;
            iVar5 = (uint)(bVar11 >> 5 & 1) * auVar444._20_4_;
            auVar487._20_4_ = iVar5;
            iVar7 = (uint)(bVar11 >> 6 & 1) * auVar444._24_4_;
            auVar487._24_4_ = iVar7;
            iVar8 = (uint)(bVar11 >> 7) * auVar444._28_4_;
            auVar487._28_4_ = iVar8;
            auVar495 = vpternlogd_avx512vl(auVar495,auVar487,auVar709,0xec);
            auVar495 = vpord_avx512vl(auVar495,auVar411);
            bVar281 = (bool)((byte)uVar279 & 1);
            bVar13 = (bool)((byte)(uVar279 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar279 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar279 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar279 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar279 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar279 >> 6) & 1);
            bVar19 = SUB81(uVar279 >> 7,0);
            bVar12 = (bool)((byte)uVar283 & 1);
            auVar488._0_4_ =
                 bVar12 * uVar286 |
                 (uint)!bVar12 * ((uint)bVar281 * auVar495._0_4_ | (uint)!bVar281 * iVar2);
            bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
            auVar488._4_4_ =
                 bVar281 * uVar659 |
                 (uint)!bVar281 * ((uint)bVar13 * auVar495._4_4_ | (uint)!bVar13 * iVar6);
            bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
            auVar488._8_4_ =
                 bVar281 * uVar660 |
                 (uint)!bVar281 * ((uint)bVar14 * auVar495._8_4_ | (uint)!bVar14 * iVar3);
            bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
            auVar488._12_4_ =
                 bVar281 * uVar661 |
                 (uint)!bVar281 * ((uint)bVar15 * auVar495._12_4_ | (uint)!bVar15 * iVar1);
            bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
            auVar488._16_4_ =
                 bVar281 * uVar662 |
                 (uint)!bVar281 * ((uint)bVar16 * auVar495._16_4_ | (uint)!bVar16 * iVar4);
            bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
            auVar488._20_4_ =
                 bVar281 * uVar663 |
                 (uint)!bVar281 * ((uint)bVar17 * auVar495._20_4_ | (uint)!bVar17 * iVar5);
            bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
            auVar488._24_4_ =
                 bVar281 * uVar664 |
                 (uint)!bVar281 * ((uint)bVar18 * auVar495._24_4_ | (uint)!bVar18 * iVar7);
            bVar281 = SUB81(uVar283 >> 7,0);
            auVar488._28_4_ =
                 bVar281 * uVar665 |
                 (uint)!bVar281 * ((uint)bVar19 * auVar495._28_4_ | (uint)!bVar19 * iVar8);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar488;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          }
        }
        if (iVar276 != 4) {
          return;
        }
        uVar279 = 0;
        while( true ) {
          if (iVar278 <= (int)uVar279 + 3) break;
          fVar666 = ptr1[uVar279 + 3];
          auVar794._20_4_ = fVar666;
          auVar794._16_4_ = fVar666;
          auVar794._24_4_ = fVar666;
          auVar794._28_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 2];
          auVar794._4_4_ = fVar666;
          auVar794._0_4_ = fVar666;
          auVar794._8_4_ = fVar666;
          auVar794._12_4_ = fVar666;
          auVar1594 = *(undefined1 (*) [64])ptr;
          fVar666 = ptr1[uVar279 + 1];
          fVar667 = ptr1[uVar279];
          vinsertf64x4_avx512f
                    (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(fVar666,fVar666
                                                                                    ))),
                                         CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(fVar667,fVar667
                                                                                    ))))),auVar794,1
                    );
          y_10[1] = (float)in_stack_fffffffffffffe7c._0_4_;
          y_10[2] = (float)in_stack_fffffffffffffe7c._4_4_;
          y_10[3] = (float)in_stack_fffffffffffffe7c._8_4_;
          y_10[0] = (float)in_stack_fffffffffffffe78;
          y_10._16_8_ = pauVar1598;
          y_10[6] = (float)(int)in_stack_fffffffffffffe90;
          y_10[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
          y_10[8] = (float)in_stack_fffffffffffffe98._0_4_;
          y_10[9] = (float)in_stack_fffffffffffffe98._4_4_;
          y_10[10] = (float)in_stack_fffffffffffffe98._8_4_;
          y_10[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
          y_10[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
          y_10[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
          y_10[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
          y_10[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
          x_10[4] = (float)(int)pfVar1599;
          x_10[0] = (float)in_stack_fffffffffffffeb8._0_4_;
          x_10[1] = (float)in_stack_fffffffffffffeb8._4_4_;
          x_10[2] = (float)in_stack_fffffffffffffeb8._8_4_;
          x_10[3] = (float)in_stack_fffffffffffffeb8._12_4_;
          x_10[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
          x_10[6] = (float)(int)in_stack_fffffffffffffed0;
          x_10[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
          x_10[8] = (float)(int)in_stack_fffffffffffffed8;
          x_10[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
          x_10[10] = (float)(int)in_stack_fffffffffffffee0;
          x_10[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
          x_10[0xc] = (float)(int)in_stack_fffffffffffffee8;
          x_10[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          x_10[0xe] = (float)(int)in_stack_fffffffffffffef0;
          x_10[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
          atan2512_ps(__return_storage_ptr__,y_10,x_10);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          uVar279 = uVar279 + 4;
        }
        auVar287 = ZEXT816(0) << 0x40;
        auVar795._8_4_ = 0x80000000;
        auVar795._0_8_ = 0x8000000080000000;
        auVar795._12_4_ = 0x80000000;
        auVar795._16_4_ = 0x80000000;
        auVar795._20_4_ = 0x80000000;
        auVar795._24_4_ = 0x80000000;
        auVar795._28_4_ = 0x80000000;
        auVar864._8_4_ = 0x40490fdb;
        auVar864._0_8_ = 0x40490fdb40490fdb;
        auVar864._12_4_ = 0x40490fdb;
        auVar864._16_4_ = 0x40490fdb;
        auVar864._20_4_ = 0x40490fdb;
        auVar864._24_4_ = 0x40490fdb;
        auVar864._28_4_ = 0x40490fdb;
        auVar942._8_4_ = 0x7fffffff;
        auVar942._0_8_ = 0x7fffffff7fffffff;
        auVar942._12_4_ = 0x7fffffff;
        auVar942._16_4_ = 0x7fffffff;
        auVar942._20_4_ = 0x7fffffff;
        auVar942._24_4_ = 0x7fffffff;
        auVar942._28_4_ = 0x7fffffff;
        auVar1001._8_4_ = 0x3f800000;
        auVar1001._0_8_ = 0x3f8000003f800000;
        auVar1001._12_4_ = 0x3f800000;
        auVar1001._16_4_ = 0x3f800000;
        auVar1001._20_4_ = 0x3f800000;
        auVar1001._24_4_ = 0x3f800000;
        auVar1001._28_4_ = 0x3f800000;
        auVar1059._8_4_ = 0xbc83a25c;
        auVar1059._0_8_ = 0xbc83a25cbc83a25c;
        auVar1059._12_4_ = 0xbc83a25c;
        auVar1059._16_4_ = 0xbc83a25c;
        auVar1059._20_4_ = 0xbc83a25c;
        auVar1059._24_4_ = 0xbc83a25c;
        auVar1059._28_4_ = 0xbc83a25c;
        auVar1112._8_4_ = 0xbd99b01e;
        auVar1112._0_8_ = 0xbd99b01ebd99b01e;
        auVar1112._12_4_ = 0xbd99b01e;
        auVar1112._16_4_ = 0xbd99b01e;
        auVar1112._20_4_ = 0xbd99b01e;
        auVar1112._24_4_ = 0xbd99b01e;
        auVar1112._28_4_ = 0xbd99b01e;
        auVar1159._8_4_ = 0xbe117200;
        auVar1159._0_8_ = 0xbe117200be117200;
        auVar1159._12_4_ = 0xbe117200;
        auVar1159._16_4_ = 0xbe117200;
        auVar1159._20_4_ = 0xbe117200;
        auVar1159._24_4_ = 0xbe117200;
        auVar1159._28_4_ = 0xbe117200;
        auVar1210._8_4_ = 0xbeaaaa53;
        auVar1210._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1210._12_4_ = 0xbeaaaa53;
        auVar1210._16_4_ = 0xbeaaaa53;
        auVar1210._20_4_ = 0xbeaaaa53;
        auVar1210._24_4_ = 0xbeaaaa53;
        auVar1210._28_4_ = 0xbeaaaa53;
        auVar1262._8_4_ = 0x3b3ac537;
        auVar1262._0_8_ = 0x3b3ac5373b3ac537;
        auVar1262._12_4_ = 0x3b3ac537;
        auVar1262._16_4_ = 0x3b3ac537;
        auVar1262._20_4_ = 0x3b3ac537;
        auVar1262._24_4_ = 0x3b3ac537;
        auVar1262._28_4_ = 0x3b3ac537;
        auVar1310._8_4_ = 0x3d2edd4e;
        auVar1310._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1310._12_4_ = 0x3d2edd4e;
        auVar1310._16_4_ = 0x3d2edd4e;
        auVar1310._20_4_ = 0x3d2edd4e;
        auVar1310._24_4_ = 0x3d2edd4e;
        auVar1310._28_4_ = 0x3d2edd4e;
        auVar1364._8_4_ = 0x3dd9ed24;
        auVar1364._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1364._12_4_ = 0x3dd9ed24;
        auVar1364._16_4_ = 0x3dd9ed24;
        auVar1364._20_4_ = 0x3dd9ed24;
        auVar1364._24_4_ = 0x3dd9ed24;
        auVar1364._28_4_ = 0x3dd9ed24;
        auVar1418._8_4_ = 0x3e4cb974;
        auVar1418._0_8_ = 0x3e4cb9743e4cb974;
        auVar1418._12_4_ = 0x3e4cb974;
        auVar1418._16_4_ = 0x3e4cb974;
        auVar1418._20_4_ = 0x3e4cb974;
        auVar1418._24_4_ = 0x3e4cb974;
        auVar1418._28_4_ = 0x3e4cb974;
        auVar1472._8_4_ = 0x3fc90fdb;
        auVar1472._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1472._12_4_ = 0x3fc90fdb;
        auVar1472._16_4_ = 0x3fc90fdb;
        auVar1472._20_4_ = 0x3fc90fdb;
        auVar1472._24_4_ = 0x3fc90fdb;
        auVar1472._28_4_ = 0x3fc90fdb;
        auVar1525._8_4_ = 0x40490fdb;
        auVar1525._0_8_ = 0x40490fdb40490fdb;
        auVar1525._12_4_ = 0x40490fdb;
        auVar1525._16_4_ = 0x40490fdb;
        auVar1525._20_4_ = 0x40490fdb;
        auVar1525._24_4_ = 0x40490fdb;
        auVar1525._28_4_ = 0x40490fdb;
        auVar1578._8_4_ = 0x3fc90fdb;
        auVar1578._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1578._12_4_ = 0x3fc90fdb;
        auVar1578._16_4_ = 0x3fc90fdb;
        auVar1578._20_4_ = 0x3fc90fdb;
        auVar1578._24_4_ = 0x3fc90fdb;
        auVar1578._28_4_ = 0x3fc90fdb;
        for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
          auVar350 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279 + 1]));
          auVar351 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279]));
          auVar411 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
          auVar495 = vinsertf32x4_avx512vl(ZEXT1632(auVar351),auVar350,1);
          uVar283 = vcmpps_avx512vl(auVar411,ZEXT1632(auVar287),4);
          uVar282 = vcmpps_avx512vl(auVar495,ZEXT1632(auVar287),4);
          uVar282 = uVar283 & uVar282;
          auVar503 = ZEXT1632(auVar287);
          uVar284 = vcmpps_avx512vl(auVar411,auVar503,1);
          auVar119._8_4_ = 0xc0490fdb;
          auVar119._0_8_ = 0xc0490fdbc0490fdb;
          auVar119._12_4_ = 0xc0490fdb;
          auVar119._16_4_ = 0xc0490fdb;
          auVar119._20_4_ = 0xc0490fdb;
          auVar119._24_4_ = 0xc0490fdb;
          auVar119._28_4_ = 0xc0490fdb;
          auVar444 = vblendmps_avx512vl(auVar864,auVar119);
          bVar281 = (bool)((byte)uVar284 & 1);
          auVar489._0_4_ = (uint)bVar281 * auVar444._0_4_ | (uint)!bVar281 * auVar351._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar489._4_4_ = (uint)bVar281 * auVar444._4_4_ | (uint)!bVar281 * auVar351._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar489._8_4_ = (uint)bVar281 * auVar444._8_4_ | (uint)!bVar281 * auVar351._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar489._12_4_ = (uint)bVar281 * auVar444._12_4_ | (uint)!bVar281 * auVar351._12_4_;
          auVar489._16_4_ = (uint)((byte)(uVar284 >> 4) & 1) * auVar444._16_4_;
          auVar489._20_4_ = (uint)((byte)(uVar284 >> 5) & 1) * auVar444._20_4_;
          auVar489._24_4_ = (uint)((byte)(uVar284 >> 6) & 1) * auVar444._24_4_;
          auVar489._28_4_ = (uint)(byte)(uVar284 >> 7) * auVar444._28_4_;
          auVar444 = vdivps_avx512vl(auVar411,auVar495);
          in_ZMM19 = ZEXT3264(auVar444);
          vandps_avx512vl(auVar444,auVar942);
          uVar284 = vcmpps_avx512vl(auVar1001,auVar444,1);
          auVar120._8_4_ = 0xbf800000;
          auVar120._0_8_ = 0xbf800000bf800000;
          auVar120._12_4_ = 0xbf800000;
          auVar120._16_4_ = 0xbf800000;
          auVar120._20_4_ = 0xbf800000;
          auVar120._24_4_ = 0xbf800000;
          auVar120._28_4_ = 0xbf800000;
          auVar558 = vblendmps_avx512vl(auVar444,auVar120);
          bVar11 = (byte)uVar284;
          auVar490._0_4_ =
               (uint)(bVar11 & 1) * auVar558._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar490._4_4_ = (uint)bVar281 * auVar558._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar490._8_4_ = (uint)bVar281 * auVar558._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar490._12_4_ = (uint)bVar281 * auVar558._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar490._16_4_ = (uint)bVar281 * auVar558._16_4_ | (uint)!bVar281 * in_ZMM21._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar490._20_4_ = (uint)bVar281 * auVar558._20_4_ | (uint)!bVar281 * in_ZMM21._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar490._24_4_ = (uint)bVar281 * auVar558._24_4_ | (uint)!bVar281 * in_ZMM21._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar490._28_4_ = (uint)bVar281 * auVar558._28_4_ | (uint)!bVar281 * in_ZMM21._28_4_;
          uVar285 = vcmpps_avx512vl(auVar495,auVar503,1);
          auVar558 = vdivps_avx512vl(auVar490,auVar444);
          auVar491._0_4_ =
               (uint)(bVar11 & 1) * auVar558._0_4_ | !(bool)(bVar11 & 1) * auVar490._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar491._4_4_ = (uint)bVar281 * auVar558._4_4_ | !bVar281 * auVar490._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar491._8_4_ = (uint)bVar281 * auVar558._8_4_ | !bVar281 * auVar490._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar491._12_4_ = (uint)bVar281 * auVar558._12_4_ | !bVar281 * auVar490._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar491._16_4_ = (uint)bVar281 * auVar558._16_4_ | !bVar281 * auVar490._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar491._20_4_ = (uint)bVar281 * auVar558._20_4_ | !bVar281 * auVar490._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar491._24_4_ = (uint)bVar281 * auVar558._24_4_ | !bVar281 * auVar490._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar491._28_4_ = (uint)bVar281 * auVar558._28_4_ | !bVar281 * auVar490._28_4_;
          in_ZMM21 = ZEXT3264(auVar491);
          auVar558 = vmulps_avx512vl(auVar491,auVar491);
          auVar498 = vmulps_avx512vl(auVar558,auVar558);
          in_ZMM22 = ZEXT3264(auVar498);
          auVar499 = vfmadd213ps_avx512vl(auVar1059,auVar498,auVar1112);
          auVar499 = vfmadd213ps_avx512vl(auVar499,auVar498,auVar1159);
          auVar499 = vfmadd213ps_avx512vl(auVar499,auVar498,auVar1210);
          auVar502 = vfmadd213ps_avx512vl(auVar1262,auVar498,auVar1310);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1364);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1418);
          auVar498 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1001);
          auVar558 = vfmadd231ps_avx512vl(auVar498,auVar558,auVar499);
          auVar558 = vmulps_avx512vl(auVar558,auVar491);
          auVar498 = vaddps_avx512vl(auVar558,auVar1472);
          auVar492._0_4_ =
               (uint)(bVar11 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar558._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar492._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * auVar558._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar492._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * auVar558._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar492._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * auVar558._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar492._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * auVar558._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar492._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * auVar558._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar492._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * auVar558._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar492._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * auVar558._28_4_;
          auVar444 = vpternlogd_avx512vl(auVar492,auVar444,auVar795,0xf8);
          auVar558 = vaddps_avx512vl(auVar444,auVar489);
          bVar281 = (bool)((byte)uVar285 & 1);
          bVar14 = (bool)((byte)(uVar285 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar285 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar285 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar285 >> 4) & 1);
          bVar22 = (bool)((byte)(uVar285 >> 5) & 1);
          bVar24 = (bool)((byte)(uVar285 >> 6) & 1);
          bVar29 = SUB81(uVar285 >> 7,0);
          auVar495 = vpternlogd_avx512vl(auVar495,auVar1525,auVar795,0xec);
          uVar1600 = vcmpps_avx512vl(auVar503,auVar495,2);
          bVar11 = ~((byte)uVar283 | (byte)uVar1600);
          auVar495 = vmovdqa32_avx512vl(auVar1525);
          iVar6 = (uint)(bVar11 & 1) * auVar495._0_4_;
          iVar5 = (uint)(bVar11 >> 1 & 1) * auVar495._4_4_;
          auVar493._4_4_ = iVar5;
          auVar493._0_4_ = iVar6;
          iVar276 = (uint)(bVar11 >> 2 & 1) * auVar495._8_4_;
          auVar493._8_4_ = iVar276;
          iVar4 = (uint)(bVar11 >> 3 & 1) * auVar495._12_4_;
          auVar493._12_4_ = iVar4;
          iVar3 = (uint)(bVar11 >> 4 & 1) * auVar495._16_4_;
          auVar493._16_4_ = iVar3;
          iVar277 = (uint)(bVar11 >> 5 & 1) * auVar495._20_4_;
          auVar493._20_4_ = iVar277;
          iVar1 = (uint)(bVar11 >> 6 & 1) * auVar495._24_4_;
          auVar493._24_4_ = iVar1;
          iVar2 = (uint)(bVar11 >> 7) * auVar495._28_4_;
          auVar493._28_4_ = iVar2;
          auVar411 = vpternlogd_avx512vl(auVar411,auVar493,auVar795,0xec);
          auVar411 = vpord_avx512vl(auVar411,auVar1578);
          bVar12 = (bool)((byte)uVar283 & 1);
          bVar15 = (bool)((byte)(uVar283 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar283 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar283 >> 3) & 1);
          bVar21 = (bool)((byte)(uVar283 >> 4) & 1);
          bVar23 = (bool)((byte)(uVar283 >> 5) & 1);
          bVar25 = (bool)((byte)(uVar283 >> 6) & 1);
          bVar30 = SUB81(uVar283 >> 7,0);
          bVar13 = (bool)((byte)uVar282 & 1);
          auVar494._0_4_ =
               (uint)bVar13 * ((uint)bVar281 * auVar558._0_4_ | (uint)!bVar281 * auVar444._0_4_) |
               (uint)!bVar13 * ((uint)bVar12 * auVar411._0_4_ | (uint)!bVar12 * iVar6);
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar494._4_4_ =
               (uint)bVar281 * ((uint)bVar14 * auVar558._4_4_ | (uint)!bVar14 * auVar444._4_4_) |
               (uint)!bVar281 * ((uint)bVar15 * auVar411._4_4_ | (uint)!bVar15 * iVar5);
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar494._8_4_ =
               (uint)bVar281 * ((uint)bVar16 * auVar558._8_4_ | (uint)!bVar16 * auVar444._8_4_) |
               (uint)!bVar281 * ((uint)bVar17 * auVar411._8_4_ | (uint)!bVar17 * iVar276);
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar494._12_4_ =
               (uint)bVar281 * ((uint)bVar18 * auVar558._12_4_ | (uint)!bVar18 * auVar444._12_4_) |
               (uint)!bVar281 * ((uint)bVar19 * auVar411._12_4_ | (uint)!bVar19 * iVar4);
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar494._16_4_ =
               (uint)bVar281 * ((uint)bVar20 * auVar558._16_4_ | (uint)!bVar20 * auVar444._16_4_) |
               (uint)!bVar281 * ((uint)bVar21 * auVar411._16_4_ | (uint)!bVar21 * iVar3);
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar494._20_4_ =
               (uint)bVar281 * ((uint)bVar22 * auVar558._20_4_ | (uint)!bVar22 * auVar444._20_4_) |
               (uint)!bVar281 * ((uint)bVar23 * auVar411._20_4_ | (uint)!bVar23 * iVar277);
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar494._24_4_ =
               (uint)bVar281 * ((uint)bVar24 * auVar558._24_4_ | (uint)!bVar24 * auVar444._24_4_) |
               (uint)!bVar281 * ((uint)bVar25 * auVar411._24_4_ | (uint)!bVar25 * iVar1);
          bVar281 = SUB81(uVar282 >> 7,0);
          auVar494._28_4_ =
               (uint)bVar281 * ((uint)bVar29 * auVar558._28_4_ | (uint)!bVar29 * auVar444._28_4_) |
               (uint)!bVar281 * ((uint)bVar30 * auVar411._28_4_ | (uint)!bVar30 * iVar2);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar494;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        lVar280 = 0;
        auVar350 = ZEXT416(0) << 0x40;
        auVar739._8_4_ = 0x80000000;
        auVar739._0_8_ = 0x8000000080000000;
        auVar739._12_4_ = 0x80000000;
        auVar829._8_4_ = 0x40490fdb;
        auVar829._0_8_ = 0x40490fdb40490fdb;
        auVar829._12_4_ = 0x40490fdb;
        auVar919._8_4_ = 0x7fffffff;
        auVar919._0_8_ = 0x7fffffff7fffffff;
        auVar919._12_4_ = 0x7fffffff;
        auVar974._8_4_ = 0x3f800000;
        auVar974._0_8_ = 0x3f8000003f800000;
        auVar974._12_4_ = 0x3f800000;
        auVar1030._8_4_ = 0xbc83a25c;
        auVar1030._0_8_ = 0xbc83a25cbc83a25c;
        auVar1030._12_4_ = 0xbc83a25c;
        auVar1085._8_4_ = 0xbd99b01e;
        auVar1085._0_8_ = 0xbd99b01ebd99b01e;
        auVar1085._12_4_ = 0xbd99b01e;
        auVar1138._8_4_ = 0xbe117200;
        auVar1138._0_8_ = 0xbe117200be117200;
        auVar1138._12_4_ = 0xbe117200;
        auVar1185._8_4_ = 0xbeaaaa53;
        auVar1185._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1185._12_4_ = 0xbeaaaa53;
        auVar1235._8_4_ = 0x3b3ac537;
        auVar1235._0_8_ = 0x3b3ac5373b3ac537;
        auVar1235._12_4_ = 0x3b3ac537;
        auVar1283._8_4_ = 0x3d2edd4e;
        auVar1283._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1283._12_4_ = 0x3d2edd4e;
        auVar1337._8_4_ = 0x3dd9ed24;
        auVar1337._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1337._12_4_ = 0x3dd9ed24;
        auVar1391._8_4_ = 0x3e4cb974;
        auVar1391._0_8_ = 0x3e4cb9743e4cb974;
        auVar1391._12_4_ = 0x3e4cb974;
        auVar1445._8_4_ = 0x3fc90fdb;
        auVar1445._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1445._12_4_ = 0x3fc90fdb;
        auVar1498._8_4_ = 0x40490fdb;
        auVar1498._0_8_ = 0x40490fdb40490fdb;
        auVar1498._12_4_ = 0x40490fdb;
        auVar287 = vpbroadcastd_avx512vl(ZEXT416(0x3fc90fdb));
        for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
            uVar283 = (ulong)((int)uVar283 + 1)) {
          auVar354 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + uVar279 * 4 + lVar280)));
          auVar351 = *(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar280 * 4);
          uVar282 = vcmpps_avx512vl(auVar351,auVar350,4);
          uVar284 = vcmpps_avx512vl(auVar354,auVar350,4);
          uVar284 = uVar282 & uVar284;
          uVar285 = vcmpps_avx512vl(auVar354,auVar350,1);
          uVar33 = vcmpps_avx512vl(auVar351,auVar350,1);
          auVar54._8_4_ = 0xc0490fdb;
          auVar54._0_8_ = 0xc0490fdbc0490fdb;
          auVar54._12_4_ = 0xc0490fdb;
          auVar355 = vblendmps_avx512vl(auVar829,auVar54);
          bVar281 = (bool)((byte)uVar33 & 1);
          auVar345._0_4_ = (uint)bVar281 * auVar355._0_4_ | (uint)!bVar281 * in_ZMM19._0_4_;
          bVar281 = (bool)((byte)(uVar33 >> 1) & 1);
          auVar345._4_4_ = (uint)bVar281 * auVar355._4_4_ | (uint)!bVar281 * in_ZMM19._4_4_;
          bVar281 = (bool)((byte)(uVar33 >> 2) & 1);
          auVar345._8_4_ = (uint)bVar281 * auVar355._8_4_ | (uint)!bVar281 * in_ZMM19._8_4_;
          bVar281 = (bool)((byte)(uVar33 >> 3) & 1);
          auVar345._12_4_ = (uint)bVar281 * auVar355._12_4_ | (uint)!bVar281 * in_ZMM19._12_4_;
          in_ZMM19 = ZEXT1664(auVar345);
          auVar355 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar354);
          auVar355 = vbroadcastss_avx512vl(auVar355);
          auVar355 = vmulps_avx512vl(auVar351,auVar355);
          auVar356 = vandps_avx512vl(auVar355,auVar919);
          uVar33 = vcmpps_avx512vl(auVar974,auVar356,1);
          auVar55._8_4_ = 0xbf800000;
          auVar55._0_8_ = 0xbf800000bf800000;
          auVar55._12_4_ = 0xbf800000;
          auVar359 = vblendmps_avx512vl(auVar356,auVar55);
          bVar11 = (byte)uVar33;
          auVar346._0_4_ =
               (uint)(bVar11 & 1) * auVar359._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM22._0_4_;
          bVar281 = (bool)((byte)(uVar33 >> 1) & 1);
          auVar346._4_4_ = (uint)bVar281 * auVar359._4_4_ | (uint)!bVar281 * in_ZMM22._4_4_;
          bVar281 = (bool)((byte)(uVar33 >> 2) & 1);
          auVar346._8_4_ = (uint)bVar281 * auVar359._8_4_ | (uint)!bVar281 * in_ZMM22._8_4_;
          bVar281 = (bool)((byte)(uVar33 >> 3) & 1);
          auVar346._12_4_ = (uint)bVar281 * auVar359._12_4_ | (uint)!bVar281 * in_ZMM22._12_4_;
          auVar356 = vdivps_avx512vl(auVar346,auVar356);
          auVar347._0_4_ =
               (uint)(bVar11 & 1) * auVar356._0_4_ | !(bool)(bVar11 & 1) * auVar346._0_4_;
          bVar281 = (bool)((byte)(uVar33 >> 1) & 1);
          auVar347._4_4_ = (uint)bVar281 * auVar356._4_4_ | !bVar281 * auVar346._4_4_;
          bVar281 = (bool)((byte)(uVar33 >> 2) & 1);
          auVar347._8_4_ = (uint)bVar281 * auVar356._8_4_ | !bVar281 * auVar346._8_4_;
          bVar281 = (bool)((byte)(uVar33 >> 3) & 1);
          auVar347._12_4_ = (uint)bVar281 * auVar356._12_4_ | !bVar281 * auVar346._12_4_;
          in_ZMM22 = ZEXT1664(auVar347);
          auVar356 = vmulps_avx512vl(auVar347,auVar347);
          auVar359 = vmulps_avx512vl(auVar356,auVar356);
          auVar360 = vfmadd213ps_avx512vl(auVar1030,auVar359,auVar1085);
          auVar360 = vfmadd213ps_avx512vl(auVar360,auVar359,auVar1138);
          auVar360 = vfmadd213ps_avx512vl(auVar360,auVar359,auVar1185);
          auVar395 = vfmadd213ps_avx512vl(auVar1235,auVar359,auVar1283);
          auVar395 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar1337);
          auVar395 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar1391);
          auVar359 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar974);
          auVar356 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar360);
          auVar356 = vmulps_avx512vl(auVar356,auVar347);
          auVar359 = vaddps_avx512vl(auVar356,auVar1445);
          auVar348._0_4_ =
               (uint)(bVar11 & 1) * auVar359._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar356._0_4_;
          bVar281 = (bool)((byte)(uVar33 >> 1) & 1);
          auVar348._4_4_ = (uint)bVar281 * auVar359._4_4_ | (uint)!bVar281 * auVar356._4_4_;
          bVar281 = (bool)((byte)(uVar33 >> 2) & 1);
          auVar348._8_4_ = (uint)bVar281 * auVar359._8_4_ | (uint)!bVar281 * auVar356._8_4_;
          bVar281 = (bool)((byte)(uVar33 >> 3) & 1);
          auVar348._12_4_ = (uint)bVar281 * auVar359._12_4_ | (uint)!bVar281 * auVar356._12_4_;
          auVar355 = vpternlogd_avx512vl(auVar348,auVar355,auVar739,0xf8);
          auVar356 = vaddps_avx512vl(auVar355,auVar345);
          bVar281 = (bool)((byte)uVar285 & 1);
          bVar14 = (bool)((byte)(uVar285 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar285 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar285 >> 3) & 1);
          auVar354 = vpternlogd_avx512vl(auVar354,auVar1498,auVar739,0xec);
          uVar1600 = vcmpps_avx512vl(auVar350,auVar354,2);
          uVar34 = ~((ushort)uVar282 | (ushort)uVar1600);
          auVar354 = vmovdqa32_avx512vl(auVar1498);
          iVar276 = (uint)((byte)uVar34 & 1) * auVar354._0_4_;
          iVar2 = (uint)((byte)(uVar34 >> 1) & 1) * auVar354._4_4_;
          auVar349._4_4_ = iVar2;
          auVar349._0_4_ = iVar276;
          iVar1 = (uint)((byte)(uVar34 >> 2) & 1) * auVar354._8_4_;
          auVar349._8_4_ = iVar1;
          iVar277 = (uint)((byte)(uVar34 >> 3) & 1) * auVar354._12_4_;
          auVar349._12_4_ = iVar277;
          auVar351 = vpternlogd_avx512vl(auVar351,auVar349,auVar739,0xec);
          auVar351 = vpord_avx512vl(auVar351,auVar287);
          bVar12 = (bool)((byte)uVar282 & 1);
          bVar15 = (bool)((byte)(uVar282 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar282 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar282 >> 3) & 1);
          bVar13 = (bool)((byte)uVar284 & 1);
          bVar16 = (bool)((byte)(uVar284 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar284 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar284 >> 3) & 1);
          pfVar1599 = (float *)((long)*(undefined1 (*) [64])outptr + lVar280 * 4);
          *pfVar1599 = (float)((uint)bVar13 *
                               ((uint)bVar281 * auVar356._0_4_ | (uint)!bVar281 * auVar355._0_4_) |
                              (uint)!bVar13 *
                              ((uint)bVar12 * auVar351._0_4_ | (uint)!bVar12 * iVar276));
          pfVar1599[1] = (float)((uint)bVar16 *
                                 ((uint)bVar14 * auVar356._4_4_ | (uint)!bVar14 * auVar355._4_4_) |
                                (uint)!bVar16 *
                                ((uint)bVar15 * auVar351._4_4_ | (uint)!bVar15 * iVar2));
          pfVar1599[2] = (float)((uint)bVar19 *
                                 ((uint)bVar17 * auVar356._8_4_ | (uint)!bVar17 * auVar355._8_4_) |
                                (uint)!bVar19 *
                                ((uint)bVar18 * auVar351._8_4_ | (uint)!bVar18 * iVar1));
          pfVar1599[3] = (float)((uint)bVar22 *
                                 ((uint)bVar20 * auVar356._12_4_ | (uint)!bVar20 * auVar355._12_4_)
                                | (uint)!bVar22 *
                                  ((uint)bVar21 * auVar351._12_4_ | (uint)!bVar21 * iVar277));
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (bw == 1) {
        auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        uVar1603 = auVar1594._0_4_;
        uVar1596 = auVar1594._4_4_;
        uVar1600 = auVar1594._8_8_;
        uVar1602 = auVar1594._16_8_;
        uVar669 = auVar1594._24_8_;
        uVar726 = auVar1594._32_8_;
        uVar728 = auVar1594._40_8_;
        for (iVar278 = 0xf; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
          uVar668 = *(undefined8 *)*(undefined1 (*) [32])ptr;
          uVar720 = *(undefined8 *)(*(undefined1 (*) [32])ptr + 8);
          uVar721 = *(undefined8 *)(*(undefined1 (*) [32])ptr + 0x10);
          uVar722 = *(undefined8 *)(*(undefined1 (*) [32])ptr + 0x18);
          uVar723 = *(undefined8 *)*(undefined1 (*) [32])((long)ptr + 0x20);
          uVar724 = *(undefined8 *)(*(undefined1 (*) [32])((long)ptr + 0x20) + 8);
          uVar725 = *(undefined8 *)(*(undefined1 (*) [32])((long)ptr + 0x20) + 0x10);
          uVar727 = *(undefined8 *)(*(undefined1 (*) [32])((long)ptr + 0x20) + 0x18);
          y_04[1] = (float)in_stack_fffffffffffffe7c._0_4_;
          y_04[2] = (float)in_stack_fffffffffffffe7c._4_4_;
          y_04[3] = (float)in_stack_fffffffffffffe7c._8_4_;
          y_04[0] = (float)in_stack_fffffffffffffe78;
          y_04._16_8_ = outptr;
          y_04[6] = (float)(int)in_stack_fffffffffffffe90;
          y_04[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
          y_04[8] = (float)in_stack_fffffffffffffe98._0_4_;
          y_04[9] = (float)in_stack_fffffffffffffe98._4_4_;
          y_04[10] = (float)in_stack_fffffffffffffe98._8_4_;
          y_04[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
          y_04[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
          y_04[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
          y_04[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
          y_04[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
          x_04[4] = (float)uVar1603;
          x_04[0] = (float)in_stack_fffffffffffffeb8._0_4_;
          x_04[1] = (float)in_stack_fffffffffffffeb8._4_4_;
          x_04[2] = (float)in_stack_fffffffffffffeb8._8_4_;
          x_04[3] = (float)in_stack_fffffffffffffeb8._12_4_;
          x_04[5] = (float)uVar1596;
          x_04[6] = (float)(int)uVar1600;
          x_04[7] = (float)(int)((ulong)uVar1600 >> 0x20);
          x_04[8] = (float)(int)uVar1602;
          x_04[9] = (float)(int)((ulong)uVar1602 >> 0x20);
          x_04[10] = (float)(int)uVar669;
          x_04[0xb] = (float)(int)((ulong)uVar669 >> 0x20);
          x_04[0xc] = (float)(int)uVar726;
          x_04[0xd] = (float)(int)((ulong)uVar726 >> 0x20);
          x_04[0xe] = (float)(int)uVar728;
          x_04[0xf] = (float)(int)((ulong)uVar728 >> 0x20);
          atan2512_ps(__return_storage_ptr__,y_04,x_04);
          *(undefined8 *)*(undefined1 (*) [32])outptr = uVar668;
          *(undefined8 *)((long)*(undefined1 (*) [32])outptr + 8) = uVar720;
          *(undefined8 *)((long)*(undefined1 (*) [32])outptr + 0x10) = uVar721;
          *(undefined8 *)((long)*(undefined1 (*) [32])outptr + 0x18) = uVar722;
          *(undefined8 *)*(undefined1 (*) [32])((long)outptr + 0x20) = uVar723;
          *(undefined8 *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 8) = uVar724;
          *(undefined8 *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x10) = uVar725;
          *(undefined8 *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x18) = uVar727;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        fVar666 = *ptr1;
        auVar792._4_4_ = fVar666;
        auVar792._0_4_ = fVar666;
        auVar792._8_4_ = fVar666;
        auVar792._12_4_ = fVar666;
        auVar792._16_4_ = fVar666;
        auVar792._20_4_ = fVar666;
        auVar792._24_4_ = fVar666;
        auVar792._28_4_ = fVar666;
        auVar863._8_4_ = 0x40490fdb;
        auVar863._0_8_ = 0x40490fdb40490fdb;
        auVar863._12_4_ = 0x40490fdb;
        auVar863._16_4_ = 0x40490fdb;
        auVar863._20_4_ = 0x40490fdb;
        auVar863._24_4_ = 0x40490fdb;
        auVar863._28_4_ = 0x40490fdb;
        auVar1056._8_4_ = 0x80000000;
        auVar1056._0_8_ = 0x8000000080000000;
        auVar1056._12_4_ = 0x80000000;
        auVar1056._16_4_ = 0x80000000;
        auVar1056._20_4_ = 0x80000000;
        auVar1056._24_4_ = 0x80000000;
        auVar1056._28_4_ = 0x80000000;
        auVar411 = vpternlogd_avx512vl(auVar1056,auVar792,auVar863,0xea);
        auVar941._0_4_ = 1.0 / fVar666;
        auVar941._4_4_ = auVar941._0_4_;
        auVar941._8_4_ = auVar941._0_4_;
        auVar941._12_4_ = auVar941._0_4_;
        auVar941._16_4_ = auVar941._0_4_;
        auVar941._20_4_ = auVar941._0_4_;
        auVar941._24_4_ = auVar941._0_4_;
        auVar941._28_4_ = auVar941._0_4_;
        iVar278 = iVar278 + -0xc;
        auVar287 = ZEXT816(0) << 0x40;
        uVar1600 = vcmpps_avx512vl(ZEXT1632(auVar287),auVar411,2);
        uVar279 = vcmpps_avx512vl(auVar792,ZEXT1632(auVar287),1);
        auVar1057._8_4_ = 0x80000000;
        auVar1057._0_8_ = 0x8000000080000000;
        auVar1057._12_4_ = 0x80000000;
        auVar1057._16_4_ = 0x80000000;
        auVar1057._20_4_ = 0x80000000;
        auVar1057._24_4_ = 0x80000000;
        auVar1057._28_4_ = 0x80000000;
        auVar1110._8_4_ = 0x40490fdb;
        auVar1110._0_8_ = 0x40490fdb40490fdb;
        auVar1110._12_4_ = 0x40490fdb;
        auVar1110._16_4_ = 0x40490fdb;
        auVar1110._20_4_ = 0x40490fdb;
        auVar1110._24_4_ = 0x40490fdb;
        auVar1110._28_4_ = 0x40490fdb;
        auVar1157._8_4_ = 0x7fffffff;
        auVar1157._0_8_ = 0x7fffffff7fffffff;
        auVar1157._12_4_ = 0x7fffffff;
        auVar1157._16_4_ = 0x7fffffff;
        auVar1157._20_4_ = 0x7fffffff;
        auVar1157._24_4_ = 0x7fffffff;
        auVar1157._28_4_ = 0x7fffffff;
        auVar1208._8_4_ = 0x3f800000;
        auVar1208._0_8_ = 0x3f8000003f800000;
        auVar1208._12_4_ = 0x3f800000;
        auVar1208._16_4_ = 0x3f800000;
        auVar1208._20_4_ = 0x3f800000;
        auVar1208._24_4_ = 0x3f800000;
        auVar1208._28_4_ = 0x3f800000;
        auVar1260._8_4_ = 0xbc83a25c;
        auVar1260._0_8_ = 0xbc83a25cbc83a25c;
        auVar1260._12_4_ = 0xbc83a25c;
        auVar1260._16_4_ = 0xbc83a25c;
        auVar1260._20_4_ = 0xbc83a25c;
        auVar1260._24_4_ = 0xbc83a25c;
        auVar1260._28_4_ = 0xbc83a25c;
        auVar1308._8_4_ = 0xbd99b01e;
        auVar1308._0_8_ = 0xbd99b01ebd99b01e;
        auVar1308._12_4_ = 0xbd99b01e;
        auVar1308._16_4_ = 0xbd99b01e;
        auVar1308._20_4_ = 0xbd99b01e;
        auVar1308._24_4_ = 0xbd99b01e;
        auVar1308._28_4_ = 0xbd99b01e;
        auVar1362._8_4_ = 0xbe117200;
        auVar1362._0_8_ = 0xbe117200be117200;
        auVar1362._12_4_ = 0xbe117200;
        auVar1362._16_4_ = 0xbe117200;
        auVar1362._20_4_ = 0xbe117200;
        auVar1362._24_4_ = 0xbe117200;
        auVar1362._28_4_ = 0xbe117200;
        auVar1416._8_4_ = 0xbeaaaa53;
        auVar1416._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1416._12_4_ = 0xbeaaaa53;
        auVar1416._16_4_ = 0xbeaaaa53;
        auVar1416._20_4_ = 0xbeaaaa53;
        auVar1416._24_4_ = 0xbeaaaa53;
        auVar1416._28_4_ = 0xbeaaaa53;
        auVar1470._8_4_ = 0x3b3ac537;
        auVar1470._0_8_ = 0x3b3ac5373b3ac537;
        auVar1470._12_4_ = 0x3b3ac537;
        auVar1470._16_4_ = 0x3b3ac537;
        auVar1470._20_4_ = 0x3b3ac537;
        auVar1470._24_4_ = 0x3b3ac537;
        auVar1470._28_4_ = 0x3b3ac537;
        auVar1523._8_4_ = 0x3d2edd4e;
        auVar1523._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1523._12_4_ = 0x3d2edd4e;
        auVar1523._16_4_ = 0x3d2edd4e;
        auVar1523._20_4_ = 0x3d2edd4e;
        auVar1523._24_4_ = 0x3d2edd4e;
        auVar1523._28_4_ = 0x3d2edd4e;
        auVar1576._8_4_ = 0x3dd9ed24;
        auVar1576._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1576._12_4_ = 0x3dd9ed24;
        auVar1576._16_4_ = 0x3dd9ed24;
        auVar1576._20_4_ = 0x3dd9ed24;
        auVar1576._24_4_ = 0x3dd9ed24;
        auVar1576._28_4_ = 0x3dd9ed24;
        auVar411 = vbroadcastss_avx512vl(ZEXT416(0x3e4cb974));
        auVar495 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        for (; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
          auVar558 = *(undefined1 (*) [32])ptr;
          auVar499 = ZEXT1632(auVar287);
          uVar283 = vcmpps_avx512vl(auVar558,auVar499,4);
          uVar282 = vcmpps_avx512vl(auVar558,auVar499,1);
          auVar121._8_4_ = 0xc0490fdb;
          auVar121._0_8_ = 0xc0490fdbc0490fdb;
          auVar121._12_4_ = 0xc0490fdb;
          auVar121._16_4_ = 0xc0490fdb;
          auVar121._20_4_ = 0xc0490fdb;
          auVar121._24_4_ = 0xc0490fdb;
          auVar121._28_4_ = 0xc0490fdb;
          auVar498 = vblendmps_avx512vl(auVar1110,auVar121);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar477._0_4_ = (uint)bVar281 * auVar498._0_4_ | (uint)!bVar281 * in_ZMM20._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar477._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * in_ZMM20._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar477._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * in_ZMM20._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar477._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * in_ZMM20._12_4_;
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar477._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * in_ZMM20._16_4_;
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar477._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * in_ZMM20._20_4_;
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar477._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * in_ZMM20._24_4_;
          bVar281 = SUB81(uVar282 >> 7,0);
          auVar477._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * in_ZMM20._28_4_;
          uVar282 = vcmpps_avx512vl(auVar792,auVar499,4);
          uVar282 = uVar283 & uVar282;
          vandps_avx512vl(auVar558,auVar1057);
          auVar558 = vmulps_avx512vl(auVar558,auVar941);
          vandps_avx512vl(auVar558,auVar1157);
          uVar284 = vcmpps_avx512vl(auVar1208,auVar558,1);
          auVar122._8_4_ = 0xbf800000;
          auVar122._0_8_ = 0xbf800000bf800000;
          auVar122._12_4_ = 0xbf800000;
          auVar122._16_4_ = 0xbf800000;
          auVar122._20_4_ = 0xbf800000;
          auVar122._24_4_ = 0xbf800000;
          auVar122._28_4_ = 0xbf800000;
          auVar498 = vblendmps_avx512vl(auVar558,auVar122);
          bVar11 = (byte)uVar284;
          auVar478._0_4_ =
               (uint)(bVar11 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM23._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar478._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * in_ZMM23._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar478._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * in_ZMM23._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar478._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * in_ZMM23._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar478._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * in_ZMM23._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar478._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * in_ZMM23._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar478._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * in_ZMM23._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar478._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * in_ZMM23._28_4_;
          auVar498 = vdivps_avx512vl(auVar478,auVar558);
          auVar479._0_4_ =
               (uint)(bVar11 & 1) * auVar498._0_4_ | !(bool)(bVar11 & 1) * auVar478._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar479._4_4_ = (uint)bVar281 * auVar498._4_4_ | !bVar281 * auVar478._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar479._8_4_ = (uint)bVar281 * auVar498._8_4_ | !bVar281 * auVar478._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar479._12_4_ = (uint)bVar281 * auVar498._12_4_ | !bVar281 * auVar478._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar479._16_4_ = (uint)bVar281 * auVar498._16_4_ | !bVar281 * auVar478._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar479._20_4_ = (uint)bVar281 * auVar498._20_4_ | !bVar281 * auVar478._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar479._24_4_ = (uint)bVar281 * auVar498._24_4_ | !bVar281 * auVar478._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar479._28_4_ = (uint)bVar281 * auVar498._28_4_ | !bVar281 * auVar478._28_4_;
          in_ZMM23 = ZEXT3264(auVar479);
          auVar498 = vmulps_avx512vl(auVar479,auVar479);
          auVar499 = vmulps_avx512vl(auVar498,auVar498);
          auVar502 = vfmadd213ps_avx512vl(auVar1260,auVar499,auVar1308);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1362);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1416);
          auVar503 = vfmadd213ps_avx512vl(auVar1470,auVar499,auVar1523);
          auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1576);
          auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar411);
          auVar499 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1208);
          auVar498 = vfmadd231ps_avx512vl(auVar499,auVar498,auVar502);
          auVar498 = vmulps_avx512vl(auVar498,auVar479);
          auVar499 = vaddps_avx512vl(auVar498,auVar495);
          auVar480._0_4_ =
               (uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar498._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar480._4_4_ = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * auVar498._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar480._8_4_ = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * auVar498._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar480._12_4_ = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * auVar498._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar480._16_4_ = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * auVar498._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar480._20_4_ = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * auVar498._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar480._24_4_ = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * auVar498._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar480._28_4_ = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * auVar498._28_4_;
          auVar558 = vpternlogd_avx512vl(auVar480,auVar558,auVar1057,0xf8);
          auVar498 = vaddps_avx512vl(auVar558,auVar477);
          bVar281 = (bool)((byte)uVar279 & 1);
          uVar286 = (uint)bVar281 * auVar498._0_4_ | (uint)!bVar281 * auVar558._0_4_;
          bVar281 = (bool)((byte)(uVar279 >> 1) & 1);
          uVar659 = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * auVar558._4_4_;
          bVar281 = (bool)((byte)(uVar279 >> 2) & 1);
          uVar660 = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * auVar558._8_4_;
          bVar281 = (bool)((byte)(uVar279 >> 3) & 1);
          uVar661 = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * auVar558._12_4_;
          bVar281 = (bool)((byte)(uVar279 >> 4) & 1);
          uVar662 = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * auVar558._16_4_;
          bVar281 = (bool)((byte)(uVar279 >> 5) & 1);
          uVar663 = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * auVar558._20_4_;
          bVar281 = (bool)((byte)(uVar279 >> 6) & 1);
          uVar664 = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * auVar558._24_4_;
          bVar281 = SUB81(uVar279 >> 7,0);
          uVar665 = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * auVar558._28_4_;
          in_ZMM22 = ZEXT3264(CONCAT428(uVar665,CONCAT424(uVar664,CONCAT420(uVar663,CONCAT416(
                                                  uVar662,CONCAT412(uVar661,CONCAT48(uVar660,
                                                  CONCAT44(uVar659,uVar286))))))));
          auVar558 = vorps_avx512vl(auVar477,auVar444);
          auVar481._4_4_ = (uint)((byte)(uVar283 >> 1) & 1) * auVar558._4_4_;
          auVar481._0_4_ = (uint)((byte)uVar283 & 1) * auVar558._0_4_;
          auVar481._8_4_ = (uint)((byte)(uVar283 >> 2) & 1) * auVar558._8_4_;
          auVar481._12_4_ = (uint)((byte)(uVar283 >> 3) & 1) * auVar558._12_4_;
          auVar481._16_4_ = (uint)((byte)(uVar283 >> 4) & 1) * auVar558._16_4_;
          auVar481._20_4_ = (uint)((byte)(uVar283 >> 5) & 1) * auVar558._20_4_;
          auVar481._24_4_ = (uint)((byte)(uVar283 >> 6) & 1) * auVar558._24_4_;
          auVar481._28_4_ = (uint)(byte)(uVar283 >> 7) * auVar558._28_4_;
          in_ZMM19 = ZEXT3264(auVar481);
          bVar11 = (byte)uVar283 | (byte)uVar1600;
          auVar558 = vorps_avx512vl(auVar481,auVar863);
          auVar498 = vmovdqa32_avx512vl(auVar481);
          bVar12 = (bool)(bVar11 >> 1 & 1);
          bVar13 = (bool)(bVar11 >> 2 & 1);
          bVar14 = (bool)(bVar11 >> 3 & 1);
          bVar15 = (bool)(bVar11 >> 4 & 1);
          bVar16 = (bool)(bVar11 >> 5 & 1);
          bVar17 = (bool)(bVar11 >> 6 & 1);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar482._0_4_ =
               bVar281 * uVar286 |
               (uint)!bVar281 *
               ((uint)(bVar11 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar558._0_4_);
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar482._4_4_ =
               bVar281 * uVar659 |
               (uint)!bVar281 * ((uint)bVar12 * auVar498._4_4_ | (uint)!bVar12 * auVar558._4_4_);
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar482._8_4_ =
               bVar281 * uVar660 |
               (uint)!bVar281 * ((uint)bVar13 * auVar498._8_4_ | (uint)!bVar13 * auVar558._8_4_);
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar482._12_4_ =
               bVar281 * uVar661 |
               (uint)!bVar281 * ((uint)bVar14 * auVar498._12_4_ | (uint)!bVar14 * auVar558._12_4_);
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar482._16_4_ =
               bVar281 * uVar662 |
               (uint)!bVar281 * ((uint)bVar15 * auVar498._16_4_ | (uint)!bVar15 * auVar558._16_4_);
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar482._20_4_ =
               bVar281 * uVar663 |
               (uint)!bVar281 * ((uint)bVar16 * auVar498._20_4_ | (uint)!bVar16 * auVar558._20_4_);
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar482._24_4_ =
               bVar281 * uVar664 |
               (uint)!bVar281 * ((uint)bVar17 * auVar498._24_4_ | (uint)!bVar17 * auVar558._24_4_);
          bVar281 = SUB81(uVar282 >> 7,0);
          auVar482._28_4_ =
               bVar281 * uVar665 |
               (uint)!bVar281 *
               ((uint)(bVar11 >> 7) * auVar498._28_4_ | (uint)!(bool)(bVar11 >> 7) * auVar558._28_4_
               );
          in_ZMM20 = ZEXT3264(auVar482);
          *(undefined1 (*) [32])outptr = auVar482;
          ptr = (float *)((long)ptr + 0x20);
          outptr = (float *)((long)outptr + 0x20);
        }
        fVar666 = *ptr1;
        auVar738._4_4_ = fVar666;
        auVar738._0_4_ = fVar666;
        auVar738._8_4_ = fVar666;
        auVar738._12_4_ = fVar666;
        auVar828._8_4_ = 0x40490fdb;
        auVar828._0_8_ = 0x40490fdb40490fdb;
        auVar828._12_4_ = 0x40490fdb;
        auVar972._8_4_ = 0x80000000;
        auVar972._0_8_ = 0x8000000080000000;
        auVar972._12_4_ = 0x80000000;
        auVar287 = vpternlogd_avx512vl(auVar972,auVar738,auVar828,0xea);
        auVar679._0_4_ = 1.0 / fVar666;
        auVar679._4_4_ = auVar679._0_4_;
        auVar679._8_4_ = auVar679._0_4_;
        auVar679._12_4_ = auVar679._0_4_;
        lVar280 = 0;
        auVar351 = ZEXT416(0) << 0x20;
        uVar1600 = vcmpps_avx512vl(auVar351,auVar287,2);
        uVar279 = vcmpps_avx512vl(auVar738,auVar351,1);
        auVar973._8_4_ = 0x80000000;
        auVar973._0_8_ = 0x8000000080000000;
        auVar973._12_4_ = 0x80000000;
        auVar1029._8_4_ = 0x40490fdb;
        auVar1029._0_8_ = 0x40490fdb40490fdb;
        auVar1029._12_4_ = 0x40490fdb;
        auVar1084._8_4_ = 0x7fffffff;
        auVar1084._0_8_ = 0x7fffffff7fffffff;
        auVar1084._12_4_ = 0x7fffffff;
        auVar1137._8_4_ = 0x3f800000;
        auVar1137._0_8_ = 0x3f8000003f800000;
        auVar1137._12_4_ = 0x3f800000;
        auVar1184._8_4_ = 0xbc83a25c;
        auVar1184._0_8_ = 0xbc83a25cbc83a25c;
        auVar1184._12_4_ = 0xbc83a25c;
        auVar1234._8_4_ = 0xbd99b01e;
        auVar1234._0_8_ = 0xbd99b01ebd99b01e;
        auVar1234._12_4_ = 0xbd99b01e;
        auVar1282._8_4_ = 0xbe117200;
        auVar1282._0_8_ = 0xbe117200be117200;
        auVar1282._12_4_ = 0xbe117200;
        auVar1336._8_4_ = 0xbeaaaa53;
        auVar1336._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1336._12_4_ = 0xbeaaaa53;
        auVar1390._8_4_ = 0x3b3ac537;
        auVar1390._0_8_ = 0x3b3ac5373b3ac537;
        auVar1390._12_4_ = 0x3b3ac537;
        auVar1444._8_4_ = 0x3d2edd4e;
        auVar1444._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1444._12_4_ = 0x3d2edd4e;
        auVar1497._8_4_ = 0x3dd9ed24;
        auVar1497._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1497._12_4_ = 0x3dd9ed24;
        auVar1551._8_4_ = 0x3e4cb974;
        auVar1551._0_8_ = 0x3e4cb9743e4cb974;
        auVar1551._12_4_ = 0x3e4cb974;
        auVar287 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        auVar350 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
          auVar354 = *(undefined1 (*) [16])(*(undefined1 (*) [32])ptr + lVar280 * 4);
          uVar283 = vcmpps_avx512vl(auVar354,auVar351,4);
          uVar282 = vcmpps_avx512vl(auVar738,auVar351,4);
          uVar282 = uVar283 & uVar282;
          uVar284 = vcmpps_avx512vl(auVar354,auVar351,1);
          auVar56._8_4_ = 0xc0490fdb;
          auVar56._0_8_ = 0xc0490fdbc0490fdb;
          auVar56._12_4_ = 0xc0490fdb;
          auVar355 = vblendmps_avx512vl(auVar1029,auVar56);
          bVar281 = (bool)((byte)uVar284 & 1);
          auVar339._0_4_ = (uint)bVar281 * auVar355._0_4_ | (uint)!bVar281 * in_ZMM19._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar339._4_4_ = (uint)bVar281 * auVar355._4_4_ | (uint)!bVar281 * in_ZMM19._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar339._8_4_ = (uint)bVar281 * auVar355._8_4_ | (uint)!bVar281 * in_ZMM19._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar339._12_4_ = (uint)bVar281 * auVar355._12_4_ | (uint)!bVar281 * in_ZMM19._12_4_;
          auVar355 = vandps_avx512vl(auVar354,auVar973);
          auVar354 = vmulps_avx512vl(auVar354,auVar679);
          auVar356 = vandps_avx512vl(auVar354,auVar1084);
          uVar284 = vcmpps_avx512vl(auVar1137,auVar356,1);
          auVar57._8_4_ = 0xbf800000;
          auVar57._0_8_ = 0xbf800000bf800000;
          auVar57._12_4_ = 0xbf800000;
          auVar359 = vblendmps_avx512vl(auVar356,auVar57);
          bVar11 = (byte)uVar284;
          auVar340._0_4_ =
               (uint)(bVar11 & 1) * auVar359._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM22._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar340._4_4_ = (uint)bVar281 * auVar359._4_4_ | (uint)!bVar281 * in_ZMM22._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar340._8_4_ = (uint)bVar281 * auVar359._8_4_ | (uint)!bVar281 * in_ZMM22._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar340._12_4_ = (uint)bVar281 * auVar359._12_4_ | (uint)!bVar281 * in_ZMM22._12_4_;
          auVar356 = vdivps_avx512vl(auVar340,auVar356);
          auVar341._0_4_ =
               (uint)(bVar11 & 1) * auVar356._0_4_ | !(bool)(bVar11 & 1) * auVar340._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar341._4_4_ = (uint)bVar281 * auVar356._4_4_ | !bVar281 * auVar340._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar341._8_4_ = (uint)bVar281 * auVar356._8_4_ | !bVar281 * auVar340._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar341._12_4_ = (uint)bVar281 * auVar356._12_4_ | !bVar281 * auVar340._12_4_;
          in_ZMM22 = ZEXT1664(auVar341);
          auVar356 = vmulps_avx512vl(auVar341,auVar341);
          auVar359 = vmulps_avx512vl(auVar356,auVar356);
          auVar360 = vfmadd213ps_avx512vl(auVar1184,auVar359,auVar1234);
          auVar360 = vfmadd213ps_avx512vl(auVar360,auVar359,auVar1282);
          auVar360 = vfmadd213ps_avx512vl(auVar360,auVar359,auVar1336);
          auVar395 = vfmadd213ps_avx512vl(auVar1390,auVar359,auVar1444);
          auVar395 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar1497);
          auVar395 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar1551);
          auVar359 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar1137);
          auVar356 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar360);
          auVar356 = vmulps_avx512vl(auVar356,auVar341);
          auVar359 = vaddps_avx512vl(auVar356,auVar287);
          auVar342._0_4_ =
               (uint)(bVar11 & 1) * auVar359._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar356._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar342._4_4_ = (uint)bVar281 * auVar359._4_4_ | (uint)!bVar281 * auVar356._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar342._8_4_ = (uint)bVar281 * auVar359._8_4_ | (uint)!bVar281 * auVar356._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar342._12_4_ = (uint)bVar281 * auVar359._12_4_ | (uint)!bVar281 * auVar356._12_4_;
          auVar354 = vpternlogd_avx512vl(auVar342,auVar354,auVar973,0xf8);
          auVar356 = vaddps_avx512vl(auVar354,auVar339);
          bVar281 = (bool)((byte)uVar279 & 1);
          bVar14 = (bool)((byte)(uVar279 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar279 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar279 >> 3) & 1);
          auVar355 = vorps_avx512vl(auVar355,auVar350);
          auVar343._4_4_ = (uint)((byte)(uVar283 >> 1) & 1) * auVar355._4_4_;
          auVar343._0_4_ = (uint)((byte)uVar283 & 1) * auVar355._0_4_;
          auVar343._8_4_ = (uint)((byte)(uVar283 >> 2) & 1) * auVar355._8_4_;
          auVar343._12_4_ = (uint)((byte)(uVar283 >> 3) & 1) * auVar355._12_4_;
          uVar34 = (ushort)uVar283 | (ushort)uVar1600;
          auVar355 = vorps_avx512vl(auVar343,auVar828);
          auVar359 = vmovdqa32_avx512vl(auVar343);
          bVar12 = (bool)((byte)uVar34 & 1);
          bVar15 = (bool)((byte)(uVar34 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar34 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar34 >> 3) & 1);
          bVar13 = (bool)((byte)uVar282 & 1);
          auVar344._0_4_ =
               (uint)bVar13 * ((uint)bVar281 * auVar356._0_4_ | (uint)!bVar281 * auVar354._0_4_) |
               (uint)!bVar13 * ((uint)bVar12 * auVar359._0_4_ | (uint)!bVar12 * auVar355._0_4_);
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar344._4_4_ =
               (uint)bVar281 * ((uint)bVar14 * auVar356._4_4_ | (uint)!bVar14 * auVar354._4_4_) |
               (uint)!bVar281 * ((uint)bVar15 * auVar359._4_4_ | (uint)!bVar15 * auVar355._4_4_);
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar344._8_4_ =
               (uint)bVar281 * ((uint)bVar16 * auVar356._8_4_ | (uint)!bVar16 * auVar354._8_4_) |
               (uint)!bVar281 * ((uint)bVar17 * auVar359._8_4_ | (uint)!bVar17 * auVar355._8_4_);
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar344._12_4_ =
               (uint)bVar281 * ((uint)bVar18 * auVar356._12_4_ | (uint)!bVar18 * auVar354._12_4_) |
               (uint)!bVar281 * ((uint)bVar19 * auVar359._12_4_ | (uint)!bVar19 * auVar355._12_4_);
          in_ZMM19 = ZEXT1664(auVar344);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [32])outptr + lVar280 * 4) = auVar344;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (aw != 1) {
        return;
      }
      pfVar1599 = ptr1;
      if (iVar276 == 0x10) {
        uVar1600 = *(undefined8 *)(ptr + 0xc);
        uVar1602 = *(undefined8 *)(ptr + 0xe);
        uVar1603 = (undefined4)*(undefined8 *)ptr;
        uVar1596 = (undefined4)((ulong)*(undefined8 *)ptr >> 0x20);
        iVar277 = iVar278;
        in_stack_fffffffffffffed0 = *(undefined8 *)(ptr + 2);
        in_stack_fffffffffffffed8 = *(undefined8 *)(ptr + 4);
        in_stack_fffffffffffffee0 = *(undefined8 *)(ptr + 6);
        in_stack_fffffffffffffee8 = *(undefined8 *)(ptr + 8);
        in_stack_fffffffffffffef0 = *(undefined8 *)(ptr + 10);
        while( true ) {
          pfVar1599 = (float *)CONCAT44(uVar1596,uVar1603);
          bVar281 = iVar277 == 0;
          iVar277 = iVar277 + -1;
          if (bVar281) break;
          vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          uVar669 = CONCAT44(uVar1596,uVar1603);
          y_09[1] = (float)in_stack_fffffffffffffe7c._0_4_;
          y_09[2] = (float)in_stack_fffffffffffffe7c._4_4_;
          y_09[3] = (float)in_stack_fffffffffffffe7c._8_4_;
          y_09[0] = (float)in_stack_fffffffffffffe78;
          y_09._16_8_ = outptr;
          y_09[6] = (float)(int)in_stack_fffffffffffffe90;
          y_09[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
          y_09[8] = (float)in_stack_fffffffffffffe98._0_4_;
          y_09[9] = (float)in_stack_fffffffffffffe98._4_4_;
          y_09[10] = (float)in_stack_fffffffffffffe98._8_4_;
          y_09[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
          y_09[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
          y_09[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
          y_09[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
          y_09[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
          x_09[4] = (float)uVar1603;
          x_09[0] = (float)in_stack_fffffffffffffeb8._0_4_;
          x_09[1] = (float)in_stack_fffffffffffffeb8._4_4_;
          x_09[2] = (float)in_stack_fffffffffffffeb8._8_4_;
          x_09[3] = (float)in_stack_fffffffffffffeb8._12_4_;
          x_09[5] = (float)uVar1596;
          x_09[6] = (float)(int)in_stack_fffffffffffffed0;
          x_09[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
          x_09[8] = (float)(int)in_stack_fffffffffffffed8;
          x_09[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
          x_09[10] = (float)(int)in_stack_fffffffffffffee0;
          x_09[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
          x_09[0xc] = (float)(int)in_stack_fffffffffffffee8;
          x_09[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          x_09[0xe] = (float)(int)in_stack_fffffffffffffef0;
          x_09[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
          uVar726 = uVar1600;
          uVar728 = uVar1602;
          uVar668 = in_stack_fffffffffffffed0;
          uVar720 = in_stack_fffffffffffffed8;
          uVar721 = in_stack_fffffffffffffee0;
          uVar722 = in_stack_fffffffffffffee8;
          uVar723 = in_stack_fffffffffffffef0;
          atan2512_ps(__return_storage_ptr__,y_09,x_09);
          *(undefined8 *)*(undefined1 (*) [64])outptr = uVar669;
          *(undefined8 *)(*(undefined1 (*) [64])outptr + 8) = in_stack_fffffffffffffed0;
          *(undefined8 *)(*(undefined1 (*) [64])outptr + 0x10) = in_stack_fffffffffffffed8;
          *(undefined8 *)(*(undefined1 (*) [64])outptr + 0x18) = in_stack_fffffffffffffee0;
          *(undefined8 *)(*(undefined1 (*) [64])outptr + 0x20) = in_stack_fffffffffffffee8;
          *(undefined8 *)(*(undefined1 (*) [64])outptr + 0x28) = in_stack_fffffffffffffef0;
          *(undefined8 *)(*(undefined1 (*) [64])outptr + 0x30) = uVar726;
          *(undefined8 *)(*(undefined1 (*) [64])outptr + 0x38) = uVar728;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          in_stack_fffffffffffffed0 = uVar668;
          in_stack_fffffffffffffed8 = uVar720;
          in_stack_fffffffffffffee0 = uVar721;
          in_stack_fffffffffffffee8 = uVar722;
          in_stack_fffffffffffffef0 = uVar723;
        }
      }
      if (iVar276 == 8) {
        auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        auVar1594 = vmovdqu64_avx512f(auVar1594);
        uVar1600 = auVar1594._0_8_;
        uVar1602 = auVar1594._8_8_;
        auVar287 = auVar1594._16_16_;
        auVar350 = auVar1594._32_16_;
        auVar351 = auVar1594._48_16_;
        iVar277 = 0;
        while( true ) {
          if (iVar278 <= iVar277 + 1) break;
          fVar666 = *ptr1;
          fVar667 = ptr1[1];
          auVar807._4_4_ = fVar667;
          auVar807._0_4_ = fVar667;
          auVar807._8_4_ = fVar667;
          auVar807._12_4_ = fVar667;
          auVar807._16_4_ = fVar667;
          auVar807._20_4_ = fVar667;
          auVar807._24_4_ = fVar667;
          auVar807._28_4_ = fVar667;
          vinsertf64x4_avx512f
                    (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,CONCAT416(
                                                  fVar666,CONCAT412(fVar666,CONCAT48(fVar666,
                                                  CONCAT44(fVar666,fVar666)))))))),auVar807,1);
          auVar573._8_8_ = uVar1602;
          auVar573._0_8_ = uVar1600;
          auVar573._16_16_ = auVar287;
          auVar573._32_16_ = auVar350;
          auVar573._48_16_ = auVar351;
          auVar1594 = vmovdqu64_avx512f(auVar573);
          y_15[1] = (float)in_stack_fffffffffffffe7c._0_4_;
          y_15[2] = (float)in_stack_fffffffffffffe7c._4_4_;
          y_15[3] = (float)in_stack_fffffffffffffe7c._8_4_;
          y_15[0] = (float)in_stack_fffffffffffffe78;
          y_15[4] = (float)(int)uVar1600;
          y_15[5] = (float)(int)((ulong)uVar1600 >> 0x20);
          y_15[6] = (float)(int)uVar1602;
          y_15[7] = (float)(int)((ulong)uVar1602 >> 0x20);
          y_15[8] = (float)auVar287._0_4_;
          y_15[9] = (float)auVar287._4_4_;
          y_15[10] = (float)auVar287._8_4_;
          y_15[0xb] = (float)auVar287._12_4_;
          y_15[0xc] = (float)auVar350._0_4_;
          y_15[0xd] = (float)auVar350._4_4_;
          y_15[0xe] = (float)auVar350._8_4_;
          y_15[0xf] = (float)auVar350._12_4_;
          x_15[4] = (float)(int)pfVar1599;
          x_15[0] = (float)auVar351._0_4_;
          x_15[1] = (float)auVar351._4_4_;
          x_15[2] = (float)auVar351._8_4_;
          x_15[3] = (float)auVar351._12_4_;
          x_15[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
          x_15[6] = (float)(int)in_stack_fffffffffffffed0;
          x_15[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
          x_15[8] = (float)(int)in_stack_fffffffffffffed8;
          x_15[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
          x_15[10] = (float)(int)in_stack_fffffffffffffee0;
          x_15[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
          x_15[0xc] = (float)(int)in_stack_fffffffffffffee8;
          x_15[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          x_15[0xe] = (float)(int)in_stack_fffffffffffffef0;
          x_15[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
          atan2512_ps(__return_storage_ptr__,y_15,x_15);
          auVar1594 = vmovdqu64_avx512f(auVar1594);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar277 = iVar277 + 2;
        }
        auVar246._8_8_ = uVar1602;
        auVar246._0_8_ = uVar1600;
        auVar246._16_16_ = auVar287;
        auVar123._8_4_ = 0x80000000;
        auVar123._0_8_ = 0x8000000080000000;
        auVar123._12_4_ = 0x80000000;
        auVar123._16_4_ = 0x80000000;
        auVar123._20_4_ = 0x80000000;
        auVar123._24_4_ = 0x80000000;
        auVar123._28_4_ = 0x80000000;
        vandps_avx512vl(auVar246,auVar123);
        auVar444 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        uVar279 = vcmpps_avx512vl(auVar246,auVar444,4);
        uVar283 = vcmpps_avx512vl(auVar246,auVar444,1);
        auVar411 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar544._0_4_ = (uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar544._4_4_ = (uint)bVar281 * auVar411._4_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar544._8_4_ = (uint)bVar281 * auVar411._8_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar544._12_4_ = (uint)bVar281 * auVar411._12_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar544._16_4_ = (uint)bVar281 * auVar411._16_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar544._20_4_ = (uint)bVar281 * auVar411._20_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar544._24_4_ = (uint)bVar281 * auVar411._24_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar544._28_4_ = (uint)bVar281 * auVar411._28_4_ | (uint)!bVar281 * 0x40490fdb;
        auVar124._8_4_ = 0x3fc90fdb;
        auVar124._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar124._12_4_ = 0x3fc90fdb;
        auVar124._16_4_ = 0x3fc90fdb;
        auVar124._20_4_ = 0x3fc90fdb;
        auVar124._24_4_ = 0x3fc90fdb;
        auVar124._28_4_ = 0x3fc90fdb;
        auVar411 = vorps_avx512vl(auVar246,auVar124);
        auVar545._4_4_ = (uint)((byte)(uVar279 >> 1) & 1) * auVar411._4_4_;
        auVar545._0_4_ = (uint)((byte)uVar279 & 1) * auVar411._0_4_;
        auVar545._8_4_ = (uint)((byte)(uVar279 >> 2) & 1) * auVar411._8_4_;
        auVar545._12_4_ = (uint)((byte)(uVar279 >> 3) & 1) * auVar411._12_4_;
        auVar545._16_4_ = (uint)((byte)(uVar279 >> 4) & 1) * auVar411._16_4_;
        auVar545._20_4_ = (uint)((byte)(uVar279 >> 5) & 1) * auVar411._20_4_;
        auVar545._24_4_ = (uint)((byte)(uVar279 >> 6) & 1) * auVar411._24_4_;
        auVar545._28_4_ = (uint)(byte)(uVar279 >> 7) * auVar411._28_4_;
        auVar953._8_4_ = 0x80000000;
        auVar953._0_8_ = 0x8000000080000000;
        auVar953._12_4_ = 0x80000000;
        auVar953._16_4_ = 0x80000000;
        auVar953._20_4_ = 0x80000000;
        auVar953._24_4_ = 0x80000000;
        auVar953._28_4_ = 0x80000000;
        auVar1014._8_4_ = 0x7fffffff;
        auVar1014._0_8_ = 0x7fffffff7fffffff;
        auVar1014._12_4_ = 0x7fffffff;
        auVar1014._16_4_ = 0x7fffffff;
        auVar1014._20_4_ = 0x7fffffff;
        auVar1014._24_4_ = 0x7fffffff;
        auVar1014._28_4_ = 0x7fffffff;
        auVar1069._8_4_ = 0x3f800000;
        auVar1069._0_8_ = 0x3f8000003f800000;
        auVar1069._12_4_ = 0x3f800000;
        auVar1069._16_4_ = 0x3f800000;
        auVar1069._20_4_ = 0x3f800000;
        auVar1069._24_4_ = 0x3f800000;
        auVar1069._28_4_ = 0x3f800000;
        auVar1122._8_4_ = 0xbc83a25c;
        auVar1122._0_8_ = 0xbc83a25cbc83a25c;
        auVar1122._12_4_ = 0xbc83a25c;
        auVar1122._16_4_ = 0xbc83a25c;
        auVar1122._20_4_ = 0xbc83a25c;
        auVar1122._24_4_ = 0xbc83a25c;
        auVar1122._28_4_ = 0xbc83a25c;
        auVar1169._8_4_ = 0xbd99b01e;
        auVar1169._0_8_ = 0xbd99b01ebd99b01e;
        auVar1169._12_4_ = 0xbd99b01e;
        auVar1169._16_4_ = 0xbd99b01e;
        auVar1169._20_4_ = 0xbd99b01e;
        auVar1169._24_4_ = 0xbd99b01e;
        auVar1169._28_4_ = 0xbd99b01e;
        auVar1219._8_4_ = 0xbe117200;
        auVar1219._0_8_ = 0xbe117200be117200;
        auVar1219._12_4_ = 0xbe117200;
        auVar1219._16_4_ = 0xbe117200;
        auVar1219._20_4_ = 0xbe117200;
        auVar1219._24_4_ = 0xbe117200;
        auVar1219._28_4_ = 0xbe117200;
        auVar1269._8_4_ = 0xbeaaaa53;
        auVar1269._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1269._12_4_ = 0xbeaaaa53;
        auVar1269._16_4_ = 0xbeaaaa53;
        auVar1269._20_4_ = 0xbeaaaa53;
        auVar1269._24_4_ = 0xbeaaaa53;
        auVar1269._28_4_ = 0xbeaaaa53;
        auVar1321._8_4_ = 0x3b3ac537;
        auVar1321._0_8_ = 0x3b3ac5373b3ac537;
        auVar1321._12_4_ = 0x3b3ac537;
        auVar1321._16_4_ = 0x3b3ac537;
        auVar1321._20_4_ = 0x3b3ac537;
        auVar1321._24_4_ = 0x3b3ac537;
        auVar1321._28_4_ = 0x3b3ac537;
        auVar1375._8_4_ = 0x3d2edd4e;
        auVar1375._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1375._12_4_ = 0x3d2edd4e;
        auVar1375._16_4_ = 0x3d2edd4e;
        auVar1375._20_4_ = 0x3d2edd4e;
        auVar1375._24_4_ = 0x3d2edd4e;
        auVar1375._28_4_ = 0x3d2edd4e;
        auVar1429._8_4_ = 0x3dd9ed24;
        auVar1429._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1429._12_4_ = 0x3dd9ed24;
        auVar1429._16_4_ = 0x3dd9ed24;
        auVar1429._20_4_ = 0x3dd9ed24;
        auVar1429._24_4_ = 0x3dd9ed24;
        auVar1429._28_4_ = 0x3dd9ed24;
        auVar1483._8_4_ = 0x3e4cb974;
        auVar1483._0_8_ = 0x3e4cb9743e4cb974;
        auVar1483._12_4_ = 0x3e4cb974;
        auVar1483._16_4_ = 0x3e4cb974;
        auVar1483._20_4_ = 0x3e4cb974;
        auVar1483._24_4_ = 0x3e4cb974;
        auVar1483._28_4_ = 0x3e4cb974;
        auVar1536._8_4_ = 0x3fc90fdb;
        auVar1536._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1536._12_4_ = 0x3fc90fdb;
        auVar1536._16_4_ = 0x3fc90fdb;
        auVar1536._20_4_ = 0x3fc90fdb;
        auVar1536._24_4_ = 0x3fc90fdb;
        auVar1536._28_4_ = 0x3fc90fdb;
        auVar411 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
        auVar495 = vorps_avx512vl(auVar545,auVar411);
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          auVar558 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar350 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar558._0_16_);
          auVar498 = vbroadcastss_avx512vl(auVar350);
          auVar245._8_8_ = uVar1602;
          auVar245._0_8_ = uVar1600;
          auVar245._16_16_ = auVar287;
          auVar498 = vmulps_avx512vl(auVar498,auVar245);
          vandps_avx512vl(auVar498,auVar1014);
          uVar283 = vcmpps_avx512vl(auVar1069,auVar498,1);
          auVar125._8_4_ = 0xbf800000;
          auVar125._0_8_ = 0xbf800000bf800000;
          auVar125._12_4_ = 0xbf800000;
          auVar125._16_4_ = 0xbf800000;
          auVar125._20_4_ = 0xbf800000;
          auVar125._24_4_ = 0xbf800000;
          auVar125._28_4_ = 0xbf800000;
          auVar499 = vblendmps_avx512vl(auVar498,auVar125);
          bVar11 = (byte)uVar283;
          auVar546._0_4_ =
               (uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar546._4_4_ = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar546._8_4_ = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar546._12_4_ = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar546._16_4_ = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * in_ZMM21._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar546._20_4_ = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * in_ZMM21._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar546._24_4_ = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * in_ZMM21._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar546._28_4_ = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * in_ZMM21._28_4_;
          auVar499 = vdivps_avx512vl(auVar546,auVar498);
          auVar547._0_4_ =
               (uint)(bVar11 & 1) * auVar499._0_4_ | !(bool)(bVar11 & 1) * auVar546._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar547._4_4_ = (uint)bVar281 * auVar499._4_4_ | !bVar281 * auVar546._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar547._8_4_ = (uint)bVar281 * auVar499._8_4_ | !bVar281 * auVar546._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar547._12_4_ = (uint)bVar281 * auVar499._12_4_ | !bVar281 * auVar546._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar547._16_4_ = (uint)bVar281 * auVar499._16_4_ | !bVar281 * auVar546._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar547._20_4_ = (uint)bVar281 * auVar499._20_4_ | !bVar281 * auVar546._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar547._24_4_ = (uint)bVar281 * auVar499._24_4_ | !bVar281 * auVar546._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar547._28_4_ = (uint)bVar281 * auVar499._28_4_ | !bVar281 * auVar546._28_4_;
          in_ZMM21 = ZEXT3264(auVar547);
          uVar282 = vcmpps_avx512vl(auVar558,auVar444,4);
          uVar282 = uVar279 & uVar282;
          uVar284 = vcmpps_avx512vl(auVar558,auVar444,1);
          auVar499 = vmulps_avx512vl(auVar547,auVar547);
          auVar502 = vmulps_avx512vl(auVar499,auVar499);
          auVar503 = vfmadd213ps_avx512vl(auVar1122,auVar502,auVar1169);
          auVar503 = vfmadd213ps_avx512vl(auVar503,auVar502,auVar1219);
          auVar503 = vfmadd213ps_avx512vl(auVar503,auVar502,auVar1269);
          auVar504 = vfmadd213ps_avx512vl(auVar1321,auVar502,auVar1375);
          auVar504 = vfmadd213ps_avx512vl(auVar504,auVar502,auVar1429);
          auVar504 = vfmadd213ps_avx512vl(auVar504,auVar502,auVar1483);
          auVar502 = vfmadd213ps_avx512vl(auVar504,auVar502,auVar1069);
          auVar499 = vfmadd231ps_avx512vl(auVar502,auVar499,auVar503);
          auVar499 = vmulps_avx512vl(auVar499,auVar547);
          auVar502 = vaddps_avx512vl(auVar499,auVar1536);
          auVar548._0_4_ =
               (uint)(bVar11 & 1) * auVar502._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar499._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar548._4_4_ = (uint)bVar281 * auVar502._4_4_ | (uint)!bVar281 * auVar499._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar548._8_4_ = (uint)bVar281 * auVar502._8_4_ | (uint)!bVar281 * auVar499._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar548._12_4_ = (uint)bVar281 * auVar502._12_4_ | (uint)!bVar281 * auVar499._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar548._16_4_ = (uint)bVar281 * auVar502._16_4_ | (uint)!bVar281 * auVar499._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar548._20_4_ = (uint)bVar281 * auVar502._20_4_ | (uint)!bVar281 * auVar499._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar548._24_4_ = (uint)bVar281 * auVar502._24_4_ | (uint)!bVar281 * auVar499._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar548._28_4_ = (uint)bVar281 * auVar502._28_4_ | (uint)!bVar281 * auVar499._28_4_;
          auVar498 = vpternlogd_avx512vl(auVar548,auVar498,auVar953,0xf8);
          auVar499 = vaddps_avx512vl(auVar498,auVar544);
          bVar281 = (bool)((byte)uVar284 & 1);
          uVar286 = (uint)bVar281 * auVar499._0_4_ | (uint)!bVar281 * auVar498._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          uVar659 = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * auVar498._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          uVar660 = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * auVar498._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          uVar661 = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * auVar498._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          uVar662 = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * auVar498._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          uVar663 = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * auVar498._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          uVar664 = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * auVar498._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          uVar665 = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * auVar498._28_4_;
          in_ZMM20 = ZEXT3264(CONCAT428(uVar665,CONCAT424(uVar664,CONCAT420(uVar663,CONCAT416(
                                                  uVar662,CONCAT412(uVar661,CONCAT48(uVar660,
                                                  CONCAT44(uVar659,uVar286))))))));
          auVar558 = vpternlogd_avx512vl(auVar558,auVar411,auVar953,0xec);
          uVar669 = vcmpps_avx512vl(auVar444,auVar558,2);
          bVar11 = (byte)uVar279 | (byte)uVar669;
          auVar498 = vpblendmd_avx512vl(auVar495,auVar545);
          bVar12 = (bool)(bVar11 >> 1 & 1);
          bVar13 = (bool)(bVar11 >> 2 & 1);
          bVar14 = (bool)(bVar11 >> 3 & 1);
          bVar15 = (bool)(bVar11 >> 4 & 1);
          bVar16 = (bool)(bVar11 >> 5 & 1);
          bVar17 = (bool)(bVar11 >> 6 & 1);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar549._0_4_ =
               bVar281 * uVar286 |
               (uint)!bVar281 *
               ((uint)(bVar11 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar558._0_4_);
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar549._4_4_ =
               bVar281 * uVar659 |
               (uint)!bVar281 * ((uint)bVar12 * auVar498._4_4_ | (uint)!bVar12 * auVar558._4_4_);
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar549._8_4_ =
               bVar281 * uVar660 |
               (uint)!bVar281 * ((uint)bVar13 * auVar498._8_4_ | (uint)!bVar13 * auVar558._8_4_);
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar549._12_4_ =
               bVar281 * uVar661 |
               (uint)!bVar281 * ((uint)bVar14 * auVar498._12_4_ | (uint)!bVar14 * auVar558._12_4_);
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar549._16_4_ =
               bVar281 * uVar662 |
               (uint)!bVar281 * ((uint)bVar15 * auVar498._16_4_ | (uint)!bVar15 * auVar558._16_4_);
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar549._20_4_ =
               bVar281 * uVar663 |
               (uint)!bVar281 * ((uint)bVar16 * auVar498._20_4_ | (uint)!bVar16 * auVar558._20_4_);
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar549._24_4_ =
               bVar281 * uVar664 |
               (uint)!bVar281 * ((uint)bVar17 * auVar498._24_4_ | (uint)!bVar17 * auVar558._24_4_);
          bVar281 = SUB81(uVar282 >> 7,0);
          auVar549._28_4_ =
               bVar281 * uVar665 |
               (uint)!bVar281 *
               ((uint)(bVar11 >> 7) * auVar498._28_4_ | (uint)!(bool)(bVar11 >> 7) * auVar558._28_4_
               );
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar549;
          ptr1 = ptr1 + 1;
          outptr = (float *)(*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      if (iVar276 != 4) {
        return;
      }
      auVar650 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar1594 = vmovdqu64_avx512f(auVar650);
      uVar1600 = auVar1594._0_8_;
      uVar1602 = auVar1594._8_8_;
      auVar351 = auVar1594._16_16_;
      auVar354 = auVar1594._32_16_;
      auVar355 = auVar1594._48_16_;
      auVar287 = auVar650._0_16_;
      auVar350 = ZEXT116(0) * auVar287 + ZEXT116(1) * auVar287;
      auVar287 = ZEXT116(0) * auVar650._16_16_ + ZEXT116(1) * auVar287;
      uVar1603 = auVar350._0_4_;
      uVar1596 = auVar350._4_4_;
      uVar669 = auVar350._8_8_;
      uVar279 = 0;
      while( true ) {
        uVar728 = auVar287._8_8_;
        uVar726 = auVar287._0_8_;
        if (iVar278 <= (int)uVar279 + 3) break;
        fVar666 = ptr1[uVar279 + 3];
        auVar716._20_4_ = fVar666;
        auVar716._16_4_ = fVar666;
        auVar716._24_4_ = fVar666;
        auVar716._28_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 2];
        auVar716._4_4_ = fVar666;
        auVar716._0_4_ = fVar666;
        auVar716._8_4_ = fVar666;
        auVar716._12_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        vinsertf64x4_avx512f
                  (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(fVar666,fVar666))
                                                ),
                                       CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(fVar667,fVar667))
                                                ))),auVar716,1);
        auVar650._8_8_ = uVar1602;
        auVar650._0_8_ = uVar1600;
        auVar650._16_16_ = auVar351;
        auVar650._32_16_ = auVar354;
        auVar650._48_16_ = auVar355;
        y_16[1] = (float)in_stack_fffffffffffffe7c._0_4_;
        y_16[2] = (float)in_stack_fffffffffffffe7c._4_4_;
        y_16[3] = (float)in_stack_fffffffffffffe7c._8_4_;
        y_16[0] = (float)in_stack_fffffffffffffe78;
        y_16[4] = (float)(int)uVar1600;
        y_16[5] = (float)(int)((ulong)uVar1600 >> 0x20);
        y_16[6] = (float)(int)uVar1602;
        y_16[7] = (float)(int)((ulong)uVar1602 >> 0x20);
        y_16[8] = (float)auVar351._0_4_;
        y_16[9] = (float)auVar351._4_4_;
        y_16[10] = (float)auVar351._8_4_;
        y_16[0xb] = (float)auVar351._12_4_;
        y_16[0xc] = (float)auVar354._0_4_;
        y_16[0xd] = (float)auVar354._4_4_;
        y_16[0xe] = (float)auVar354._8_4_;
        y_16[0xf] = (float)auVar354._12_4_;
        x_16[4] = (float)uVar1603;
        x_16[0] = (float)auVar355._0_4_;
        x_16[1] = (float)auVar355._4_4_;
        x_16[2] = (float)auVar355._8_4_;
        x_16[3] = (float)auVar355._12_4_;
        x_16[5] = (float)uVar1596;
        x_16[6] = (float)(int)uVar669;
        x_16[7] = (float)(int)((ulong)uVar669 >> 0x20);
        x_16[8] = (float)(int)uVar726;
        x_16[9] = (float)(int)((ulong)uVar726 >> 0x20);
        x_16[10] = (float)(int)uVar728;
        x_16[0xb] = (float)(int)((ulong)uVar728 >> 0x20);
        x_16[0xc] = (float)(int)in_stack_fffffffffffffee8;
        x_16[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
        x_16[0xe] = (float)(int)in_stack_fffffffffffffef0;
        x_16[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
        atan2512_ps(__return_storage_ptr__,y_16,x_16);
        *(undefined1 (*) [64])outptr = auVar650;
        outptr = (float *)((long)outptr + 0x40);
        uVar279 = uVar279 + 4;
      }
      auVar252._4_4_ = uVar1596;
      auVar252._0_4_ = uVar1603;
      auVar252._8_8_ = uVar669;
      auVar252._16_8_ = uVar726;
      auVar252._24_8_ = uVar728;
      auVar126._8_4_ = 0x80000000;
      auVar126._0_8_ = 0x8000000080000000;
      auVar126._12_4_ = 0x80000000;
      auVar126._16_4_ = 0x80000000;
      auVar126._20_4_ = 0x80000000;
      auVar126._24_4_ = 0x80000000;
      auVar126._28_4_ = 0x80000000;
      vandps_avx512vl(auVar252,auVar126);
      auVar495 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      uVar283 = vcmpps_avx512vl(auVar252,auVar495,4);
      uVar282 = vcmpps_avx512vl(auVar252,auVar495,1);
      auVar411 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
      bVar281 = (bool)((byte)uVar282 & 1);
      auVar550._0_4_ = (uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
      auVar550._4_4_ = (uint)bVar281 * auVar411._4_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
      auVar550._8_4_ = (uint)bVar281 * auVar411._8_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
      auVar550._12_4_ = (uint)bVar281 * auVar411._12_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
      auVar550._16_4_ = (uint)bVar281 * auVar411._16_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
      auVar550._20_4_ = (uint)bVar281 * auVar411._20_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
      auVar550._24_4_ = (uint)bVar281 * auVar411._24_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = SUB81(uVar282 >> 7,0);
      auVar550._28_4_ = (uint)bVar281 * auVar411._28_4_ | (uint)!bVar281 * 0x40490fdb;
      auVar127._8_4_ = 0x3fc90fdb;
      auVar127._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar127._12_4_ = 0x3fc90fdb;
      auVar127._16_4_ = 0x3fc90fdb;
      auVar127._20_4_ = 0x3fc90fdb;
      auVar127._24_4_ = 0x3fc90fdb;
      auVar127._28_4_ = 0x3fc90fdb;
      auVar411 = vorps_avx512vl(auVar650._0_32_,auVar127);
      auVar551._4_4_ = (uint)((byte)(uVar283 >> 1) & 1) * auVar411._4_4_;
      auVar551._0_4_ = (uint)((byte)uVar283 & 1) * auVar411._0_4_;
      auVar551._8_4_ = (uint)((byte)(uVar283 >> 2) & 1) * auVar411._8_4_;
      auVar551._12_4_ = (uint)((byte)(uVar283 >> 3) & 1) * auVar411._12_4_;
      auVar551._16_4_ = (uint)((byte)(uVar283 >> 4) & 1) * auVar411._16_4_;
      auVar551._20_4_ = (uint)((byte)(uVar283 >> 5) & 1) * auVar411._20_4_;
      auVar551._24_4_ = (uint)((byte)(uVar283 >> 6) & 1) * auVar411._24_4_;
      auVar551._28_4_ = (uint)(byte)(uVar283 >> 7) * auVar411._28_4_;
      auVar954._8_4_ = 0x80000000;
      auVar954._0_8_ = 0x8000000080000000;
      auVar954._12_4_ = 0x80000000;
      auVar954._16_4_ = 0x80000000;
      auVar954._20_4_ = 0x80000000;
      auVar954._24_4_ = 0x80000000;
      auVar954._28_4_ = 0x80000000;
      auVar1015._8_4_ = 0x7fffffff;
      auVar1015._0_8_ = 0x7fffffff7fffffff;
      auVar1015._12_4_ = 0x7fffffff;
      auVar1015._16_4_ = 0x7fffffff;
      auVar1015._20_4_ = 0x7fffffff;
      auVar1015._24_4_ = 0x7fffffff;
      auVar1015._28_4_ = 0x7fffffff;
      auVar1070._8_4_ = 0x3f800000;
      auVar1070._0_8_ = 0x3f8000003f800000;
      auVar1070._12_4_ = 0x3f800000;
      auVar1070._16_4_ = 0x3f800000;
      auVar1070._20_4_ = 0x3f800000;
      auVar1070._24_4_ = 0x3f800000;
      auVar1070._28_4_ = 0x3f800000;
      auVar1123._8_4_ = 0xbc83a25c;
      auVar1123._0_8_ = 0xbc83a25cbc83a25c;
      auVar1123._12_4_ = 0xbc83a25c;
      auVar1123._16_4_ = 0xbc83a25c;
      auVar1123._20_4_ = 0xbc83a25c;
      auVar1123._24_4_ = 0xbc83a25c;
      auVar1123._28_4_ = 0xbc83a25c;
      auVar1170._8_4_ = 0xbd99b01e;
      auVar1170._0_8_ = 0xbd99b01ebd99b01e;
      auVar1170._12_4_ = 0xbd99b01e;
      auVar1170._16_4_ = 0xbd99b01e;
      auVar1170._20_4_ = 0xbd99b01e;
      auVar1170._24_4_ = 0xbd99b01e;
      auVar1170._28_4_ = 0xbd99b01e;
      auVar1220._8_4_ = 0xbe117200;
      auVar1220._0_8_ = 0xbe117200be117200;
      auVar1220._12_4_ = 0xbe117200;
      auVar1220._16_4_ = 0xbe117200;
      auVar1220._20_4_ = 0xbe117200;
      auVar1220._24_4_ = 0xbe117200;
      auVar1220._28_4_ = 0xbe117200;
      auVar1270._8_4_ = 0xbeaaaa53;
      auVar1270._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1270._12_4_ = 0xbeaaaa53;
      auVar1270._16_4_ = 0xbeaaaa53;
      auVar1270._20_4_ = 0xbeaaaa53;
      auVar1270._24_4_ = 0xbeaaaa53;
      auVar1270._28_4_ = 0xbeaaaa53;
      auVar1322._8_4_ = 0x3b3ac537;
      auVar1322._0_8_ = 0x3b3ac5373b3ac537;
      auVar1322._12_4_ = 0x3b3ac537;
      auVar1322._16_4_ = 0x3b3ac537;
      auVar1322._20_4_ = 0x3b3ac537;
      auVar1322._24_4_ = 0x3b3ac537;
      auVar1322._28_4_ = 0x3b3ac537;
      auVar1376._8_4_ = 0x3d2edd4e;
      auVar1376._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1376._12_4_ = 0x3d2edd4e;
      auVar1376._16_4_ = 0x3d2edd4e;
      auVar1376._20_4_ = 0x3d2edd4e;
      auVar1376._24_4_ = 0x3d2edd4e;
      auVar1376._28_4_ = 0x3d2edd4e;
      auVar1430._8_4_ = 0x3dd9ed24;
      auVar1430._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1430._12_4_ = 0x3dd9ed24;
      auVar1430._16_4_ = 0x3dd9ed24;
      auVar1430._20_4_ = 0x3dd9ed24;
      auVar1430._24_4_ = 0x3dd9ed24;
      auVar1430._28_4_ = 0x3dd9ed24;
      auVar1484._8_4_ = 0x3e4cb974;
      auVar1484._0_8_ = 0x3e4cb9743e4cb974;
      auVar1484._12_4_ = 0x3e4cb974;
      auVar1484._16_4_ = 0x3e4cb974;
      auVar1484._20_4_ = 0x3e4cb974;
      auVar1484._24_4_ = 0x3e4cb974;
      auVar1484._28_4_ = 0x3e4cb974;
      auVar1537._8_4_ = 0x3fc90fdb;
      auVar1537._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1537._12_4_ = 0x3fc90fdb;
      auVar1537._16_4_ = 0x3fc90fdb;
      auVar1537._20_4_ = 0x3fc90fdb;
      auVar1537._24_4_ = 0x3fc90fdb;
      auVar1537._28_4_ = 0x3fc90fdb;
      auVar1589._8_4_ = 0x40490fdb;
      auVar1589._0_8_ = 0x40490fdb40490fdb;
      auVar1589._12_4_ = 0x40490fdb;
      auVar1589._16_4_ = 0x40490fdb;
      auVar1589._20_4_ = 0x40490fdb;
      auVar1589._24_4_ = 0x40490fdb;
      auVar1589._28_4_ = 0x40490fdb;
      auVar411 = vorps_avx512vl(auVar551,auVar1589);
      for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
        auVar287 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279 + 1]));
        auVar350 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279]));
        auVar444 = vinsertf32x4_avx512vl(ZEXT1632(auVar350),auVar287,1);
        uVar282 = vcmpps_avx512vl(auVar444,auVar495,4);
        uVar282 = uVar283 & uVar282;
        uVar284 = vcmpps_avx512vl(auVar444,auVar495,1);
        auVar253._4_4_ = uVar1596;
        auVar253._0_4_ = uVar1603;
        auVar253._8_8_ = uVar669;
        auVar253._16_8_ = uVar726;
        auVar253._24_8_ = uVar728;
        auVar558 = vdivps_avx512vl(auVar253,auVar444);
        vandps_avx512vl(auVar558,auVar1015);
        uVar285 = vcmpps_avx512vl(auVar1070,auVar558,1);
        auVar128._8_4_ = 0xbf800000;
        auVar128._0_8_ = 0xbf800000bf800000;
        auVar128._12_4_ = 0xbf800000;
        auVar128._16_4_ = 0xbf800000;
        auVar128._20_4_ = 0xbf800000;
        auVar128._24_4_ = 0xbf800000;
        auVar128._28_4_ = 0xbf800000;
        auVar498 = vblendmps_avx512vl(auVar558,auVar128);
        bVar11 = (byte)uVar285;
        auVar552._0_4_ =
             (uint)(bVar11 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM20._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar552._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * in_ZMM20._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar552._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * in_ZMM20._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar552._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * in_ZMM20._12_4_;
        bVar281 = (bool)((byte)(uVar285 >> 4) & 1);
        auVar552._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * in_ZMM20._16_4_;
        bVar281 = (bool)((byte)(uVar285 >> 5) & 1);
        auVar552._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * in_ZMM20._20_4_;
        bVar281 = (bool)((byte)(uVar285 >> 6) & 1);
        auVar552._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * in_ZMM20._24_4_;
        bVar281 = SUB81(uVar285 >> 7,0);
        auVar552._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * in_ZMM20._28_4_;
        auVar498 = vdivps_avx512vl(auVar552,auVar558);
        auVar553._0_4_ = (uint)(bVar11 & 1) * auVar498._0_4_ | !(bool)(bVar11 & 1) * auVar552._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar553._4_4_ = (uint)bVar281 * auVar498._4_4_ | !bVar281 * auVar552._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar553._8_4_ = (uint)bVar281 * auVar498._8_4_ | !bVar281 * auVar552._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar553._12_4_ = (uint)bVar281 * auVar498._12_4_ | !bVar281 * auVar552._12_4_;
        bVar281 = (bool)((byte)(uVar285 >> 4) & 1);
        auVar553._16_4_ = (uint)bVar281 * auVar498._16_4_ | !bVar281 * auVar552._16_4_;
        bVar281 = (bool)((byte)(uVar285 >> 5) & 1);
        auVar553._20_4_ = (uint)bVar281 * auVar498._20_4_ | !bVar281 * auVar552._20_4_;
        bVar281 = (bool)((byte)(uVar285 >> 6) & 1);
        auVar553._24_4_ = (uint)bVar281 * auVar498._24_4_ | !bVar281 * auVar552._24_4_;
        bVar281 = SUB81(uVar285 >> 7,0);
        auVar553._28_4_ = (uint)bVar281 * auVar498._28_4_ | !bVar281 * auVar552._28_4_;
        in_ZMM20 = ZEXT3264(auVar553);
        auVar498 = vmulps_avx512vl(auVar553,auVar553);
        auVar499 = vmulps_avx512vl(auVar498,auVar498);
        in_ZMM21 = ZEXT3264(auVar499);
        auVar502 = vfmadd213ps_avx512vl(auVar1123,auVar499,auVar1170);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1220);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1270);
        auVar503 = vfmadd213ps_avx512vl(auVar1322,auVar499,auVar1376);
        auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1430);
        auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1484);
        auVar499 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1070);
        auVar498 = vfmadd231ps_avx512vl(auVar499,auVar498,auVar502);
        auVar498 = vmulps_avx512vl(auVar498,auVar553);
        auVar499 = vaddps_avx512vl(auVar498,auVar1537);
        auVar554._0_4_ =
             (uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar498._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar554._4_4_ = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * auVar498._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar554._8_4_ = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * auVar498._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar554._12_4_ = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * auVar498._12_4_;
        bVar281 = (bool)((byte)(uVar285 >> 4) & 1);
        auVar554._16_4_ = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * auVar498._16_4_;
        bVar281 = (bool)((byte)(uVar285 >> 5) & 1);
        auVar554._20_4_ = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * auVar498._20_4_;
        bVar281 = (bool)((byte)(uVar285 >> 6) & 1);
        auVar554._24_4_ = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * auVar498._24_4_;
        bVar281 = SUB81(uVar285 >> 7,0);
        auVar554._28_4_ = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * auVar498._28_4_;
        auVar558 = vpternlogd_avx512vl(auVar554,auVar558,auVar954,0xf8);
        auVar498 = vaddps_avx512vl(auVar558,auVar550);
        bVar281 = (bool)((byte)uVar284 & 1);
        bVar13 = (bool)((byte)(uVar284 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar284 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar284 >> 3) & 1);
        bVar22 = (bool)((byte)(uVar284 >> 4) & 1);
        bVar25 = (bool)((byte)(uVar284 >> 5) & 1);
        bVar26 = (bool)((byte)(uVar284 >> 6) & 1);
        bVar31 = SUB81(uVar284 >> 7,0);
        auVar444 = vpternlogd_avx512vl(auVar444,auVar1589,auVar954,0xec);
        uVar668 = vcmpps_avx512vl(auVar495,auVar444,2);
        bVar11 = (byte)uVar283 | (byte)uVar668;
        auVar499 = vpblendmd_avx512vl(auVar411,auVar551);
        bVar14 = (bool)(bVar11 >> 1 & 1);
        bVar17 = (bool)(bVar11 >> 2 & 1);
        bVar20 = (bool)(bVar11 >> 3 & 1);
        bVar23 = (bool)(bVar11 >> 4 & 1);
        bVar29 = (bool)(bVar11 >> 5 & 1);
        bVar27 = (bool)(bVar11 >> 6 & 1);
        bVar12 = (bool)((byte)uVar282 & 1);
        bVar15 = (bool)((byte)(uVar282 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar282 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar282 >> 3) & 1);
        bVar24 = (bool)((byte)(uVar282 >> 4) & 1);
        bVar30 = (bool)((byte)(uVar282 >> 5) & 1);
        bVar28 = (bool)((byte)(uVar282 >> 6) & 1);
        bVar32 = SUB81(uVar282 >> 7,0);
        *(uint *)*(undefined1 (*) [64])outptr =
             (uint)bVar12 * ((uint)bVar281 * auVar498._0_4_ | (uint)!bVar281 * auVar558._0_4_) |
             (uint)!bVar12 *
             ((uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar444._0_4_);
        *(uint *)(*(undefined1 (*) [64])outptr + 4) =
             (uint)bVar15 * ((uint)bVar13 * auVar498._4_4_ | (uint)!bVar13 * auVar558._4_4_) |
             (uint)!bVar15 * ((uint)bVar14 * auVar499._4_4_ | (uint)!bVar14 * auVar444._4_4_);
        *(uint *)(*(undefined1 (*) [64])outptr + 8) =
             (uint)bVar18 * ((uint)bVar16 * auVar498._8_4_ | (uint)!bVar16 * auVar558._8_4_) |
             (uint)!bVar18 * ((uint)bVar17 * auVar499._8_4_ | (uint)!bVar17 * auVar444._8_4_);
        *(uint *)(*(undefined1 (*) [64])outptr + 0xc) =
             (uint)bVar21 * ((uint)bVar19 * auVar498._12_4_ | (uint)!bVar19 * auVar558._12_4_) |
             (uint)!bVar21 * ((uint)bVar20 * auVar499._12_4_ | (uint)!bVar20 * auVar444._12_4_);
        *(uint *)(*(undefined1 (*) [64])outptr + 0x10) =
             (uint)bVar24 * ((uint)bVar22 * auVar498._16_4_ | (uint)!bVar22 * auVar558._16_4_) |
             (uint)!bVar24 * ((uint)bVar23 * auVar499._16_4_ | (uint)!bVar23 * auVar444._16_4_);
        *(uint *)(*(undefined1 (*) [64])outptr + 0x14) =
             (uint)bVar30 * ((uint)bVar25 * auVar498._20_4_ | (uint)!bVar25 * auVar558._20_4_) |
             (uint)!bVar30 * ((uint)bVar29 * auVar499._20_4_ | (uint)!bVar29 * auVar444._20_4_);
        *(uint *)(*(undefined1 (*) [64])outptr + 0x18) =
             (uint)bVar28 * ((uint)bVar26 * auVar498._24_4_ | (uint)!bVar26 * auVar558._24_4_) |
             (uint)!bVar28 * ((uint)bVar27 * auVar499._24_4_ | (uint)!bVar27 * auVar444._24_4_);
        *(uint *)(*(undefined1 (*) [64])outptr + 0x1c) =
             (uint)bVar32 * ((uint)bVar31 * auVar498._28_4_ | (uint)!bVar31 * auVar558._28_4_) |
             (uint)!bVar32 *
             ((uint)(bVar11 >> 7) * auVar499._28_4_ | (uint)!(bool)(bVar11 >> 7) * auVar444._28_4_);
        outptr = (float *)(*(undefined1 (*) [64])outptr + 0x20);
      }
      auVar247._8_8_ = uVar1602;
      auVar247._0_8_ = uVar1600;
      uVar283 = vcmpps_avx512vl(auVar247,(undefined1  [16])0x0,4);
      auVar58._8_4_ = 0x80000000;
      auVar58._0_8_ = 0x8000000080000000;
      auVar58._12_4_ = 0x80000000;
      auVar287 = vandps_avx512vl(auVar247,auVar58);
      uVar282 = vcmpps_avx512vl(auVar247,(undefined1  [16])0x0,1);
      auVar350 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
      bVar281 = (bool)((byte)uVar282 & 1);
      auVar387._0_4_ = (uint)bVar281 * auVar350._0_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
      auVar387._4_4_ = (uint)bVar281 * auVar350._4_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
      auVar387._8_4_ = (uint)bVar281 * auVar350._8_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
      auVar387._12_4_ = (uint)bVar281 * auVar350._12_4_ | (uint)!bVar281 * 0x40490fdb;
      auVar59._8_4_ = 0x3fc90fdb;
      auVar59._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar59._12_4_ = 0x3fc90fdb;
      auVar287 = vorps_avx512vl(auVar287,auVar59);
      auVar388._4_4_ = (uint)((byte)(uVar283 >> 1) & 1) * auVar287._4_4_;
      auVar388._0_4_ = (uint)((byte)uVar283 & 1) * auVar287._0_4_;
      auVar388._8_4_ = (uint)((byte)(uVar283 >> 2) & 1) * auVar287._8_4_;
      auVar388._12_4_ = (uint)((byte)(uVar283 >> 3) & 1) * auVar287._12_4_;
      auVar926._8_4_ = 0x80000000;
      auVar926._0_8_ = 0x8000000080000000;
      auVar926._12_4_ = 0x80000000;
      lVar280 = 0;
      auVar1038._8_4_ = 0x7fffffff;
      auVar1038._0_8_ = 0x7fffffff7fffffff;
      auVar1038._12_4_ = 0x7fffffff;
      auVar1093._8_4_ = 0x3f800000;
      auVar1093._0_8_ = 0x3f8000003f800000;
      auVar1093._12_4_ = 0x3f800000;
      auVar1146._8_4_ = 0xbc83a25c;
      auVar1146._0_8_ = 0xbc83a25cbc83a25c;
      auVar1146._12_4_ = 0xbc83a25c;
      auVar1193._8_4_ = 0xbd99b01e;
      auVar1193._0_8_ = 0xbd99b01ebd99b01e;
      auVar1193._12_4_ = 0xbd99b01e;
      auVar1243._8_4_ = 0xbe117200;
      auVar1243._0_8_ = 0xbe117200be117200;
      auVar1243._12_4_ = 0xbe117200;
      auVar1291._8_4_ = 0xbeaaaa53;
      auVar1291._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1291._12_4_ = 0xbeaaaa53;
      auVar1345._8_4_ = 0x3b3ac537;
      auVar1345._0_8_ = 0x3b3ac5373b3ac537;
      auVar1345._12_4_ = 0x3b3ac537;
      auVar1399._8_4_ = 0x3d2edd4e;
      auVar1399._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1399._12_4_ = 0x3d2edd4e;
      auVar1453._8_4_ = 0x3dd9ed24;
      auVar1453._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1453._12_4_ = 0x3dd9ed24;
      auVar1506._8_4_ = 0x3e4cb974;
      auVar1506._0_8_ = 0x3e4cb9743e4cb974;
      auVar1506._12_4_ = 0x3e4cb974;
      auVar1559._8_4_ = 0x3fc90fdb;
      auVar1559._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1559._12_4_ = 0x3fc90fdb;
      auVar287 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
      auVar350 = vorps_avx512vl(auVar388,auVar287);
      for (uVar282 = uVar279 & 0xffffffff; (int)uVar282 < iVar278;
          uVar282 = (ulong)((int)uVar282 + 1)) {
        auVar351 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + uVar279 * 4 + lVar280)));
        auVar354 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar351);
        auVar354 = vbroadcastss_avx512vl(auVar354);
        auVar243._8_8_ = uVar1602;
        auVar243._0_8_ = uVar1600;
        auVar354 = vmulps_avx512vl(auVar354,auVar243);
        auVar355 = vandps_avx512vl(auVar354,auVar1038);
        uVar284 = vcmpps_avx512vl(auVar1093,auVar355,1);
        auVar60._8_4_ = 0xbf800000;
        auVar60._0_8_ = 0xbf800000bf800000;
        auVar60._12_4_ = 0xbf800000;
        auVar356 = vblendmps_avx512vl(auVar355,auVar60);
        bVar11 = (byte)uVar284;
        auVar389._0_4_ =
             (uint)(bVar11 & 1) * auVar356._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar389._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar389._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar389._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
        uVar285 = vcmpps_avx512vl(auVar351,(undefined1  [16])0x0,4);
        uVar285 = uVar283 & uVar285;
        uVar33 = vcmpps_avx512vl(auVar351,(undefined1  [16])0x0,1);
        auVar355 = vdivps_avx512vl(auVar389,auVar355);
        auVar390._0_4_ = (uint)(bVar11 & 1) * auVar355._0_4_ | !(bool)(bVar11 & 1) * auVar389._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar390._4_4_ = (uint)bVar281 * auVar355._4_4_ | !bVar281 * auVar389._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar390._8_4_ = (uint)bVar281 * auVar355._8_4_ | !bVar281 * auVar389._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar390._12_4_ = (uint)bVar281 * auVar355._12_4_ | !bVar281 * auVar389._12_4_;
        in_ZMM21 = ZEXT1664(auVar390);
        auVar355 = vmulps_avx512vl(auVar390,auVar390);
        auVar356 = vmulps_avx512vl(auVar355,auVar355);
        auVar359 = vfmadd213ps_avx512vl(auVar1146,auVar356,auVar1193);
        auVar359 = vfmadd213ps_avx512vl(auVar359,auVar356,auVar1243);
        auVar359 = vfmadd213ps_avx512vl(auVar359,auVar356,auVar1291);
        auVar360 = vfmadd213ps_avx512vl(auVar1345,auVar356,auVar1399);
        auVar360 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1453);
        auVar360 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1506);
        auVar356 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1093);
        auVar355 = vfmadd231ps_avx512vl(auVar356,auVar355,auVar359);
        auVar355 = vmulps_avx512vl(auVar355,auVar390);
        auVar356 = vaddps_avx512vl(auVar355,auVar1559);
        auVar391._0_4_ =
             (uint)(bVar11 & 1) * auVar356._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar355._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar391._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * auVar355._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar391._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * auVar355._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar391._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * auVar355._12_4_;
        auVar354 = vpternlogd_avx512vl(auVar391,auVar354,auVar926,0xf8);
        auVar355 = vaddps_avx512vl(auVar354,auVar387);
        bVar281 = (bool)((byte)uVar33 & 1);
        bVar14 = (bool)((byte)(uVar33 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar33 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar351 = vpternlogd_avx512vl(auVar351,auVar287,auVar926,0xec);
        uVar669 = vcmpps_avx512vl((undefined1  [16])0x0,auVar351,2);
        uVar34 = (ushort)uVar283 | (ushort)uVar669;
        auVar356 = vpblendmd_avx512vl(auVar350,auVar388);
        bVar12 = (bool)((byte)uVar34 & 1);
        bVar15 = (bool)((byte)(uVar34 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar34 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar34 >> 3) & 1);
        bVar13 = (bool)((byte)uVar285 & 1);
        bVar16 = (bool)((byte)(uVar285 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar285 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar285 >> 3) & 1);
        puVar10 = (uint *)(*(undefined1 (*) [64])outptr + lVar280 * 4);
        *puVar10 = (uint)bVar13 * ((uint)bVar281 * auVar355._0_4_ | (uint)!bVar281 * auVar354._0_4_)
                   | (uint)!bVar13 *
                     ((uint)bVar12 * auVar356._0_4_ | (uint)!bVar12 * auVar351._0_4_);
        puVar10[1] = (uint)bVar16 * ((uint)bVar14 * auVar355._4_4_ | (uint)!bVar14 * auVar354._4_4_)
                     | (uint)!bVar16 *
                       ((uint)bVar15 * auVar356._4_4_ | (uint)!bVar15 * auVar351._4_4_);
        puVar10[2] = (uint)bVar19 * ((uint)bVar17 * auVar355._8_4_ | (uint)!bVar17 * auVar354._8_4_)
                     | (uint)!bVar19 *
                       ((uint)bVar18 * auVar356._8_4_ | (uint)!bVar18 * auVar351._8_4_);
        puVar10[3] = (uint)bVar22 *
                     ((uint)bVar20 * auVar355._12_4_ | (uint)!bVar20 * auVar354._12_4_) |
                     (uint)!bVar22 *
                     ((uint)bVar21 * auVar356._12_4_ | (uint)!bVar21 * auVar351._12_4_);
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw == bw) {
      uVar279 = 0;
      pfVar1599 = ptr1;
      while( true ) {
        if (iVar277 <= (int)uVar279 + 0xf) break;
        auVar1594 = *(undefined1 (*) [64])(ptr + uVar279);
        vmovdqu64_avx512f(*(undefined1 (*) [64])(ptr1 + uVar279));
        y_00[1] = (float)in_stack_fffffffffffffe7c._0_4_;
        y_00[2] = (float)in_stack_fffffffffffffe7c._4_4_;
        y_00[3] = (float)in_stack_fffffffffffffe7c._8_4_;
        y_00[0] = (float)in_stack_fffffffffffffe78;
        y_00._16_8_ = outptr;
        y_00[6] = (float)(int)in_stack_fffffffffffffe90;
        y_00[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
        y_00[8] = (float)in_stack_fffffffffffffe98._0_4_;
        y_00[9] = (float)in_stack_fffffffffffffe98._4_4_;
        y_00[10] = (float)in_stack_fffffffffffffe98._8_4_;
        y_00[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
        y_00[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
        y_00[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
        y_00[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
        y_00[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
        x_00[4] = (float)(int)pfVar1599;
        x_00[0] = (float)in_stack_fffffffffffffeb8._0_4_;
        x_00[1] = (float)in_stack_fffffffffffffeb8._4_4_;
        x_00[2] = (float)in_stack_fffffffffffffeb8._8_4_;
        x_00[3] = (float)in_stack_fffffffffffffeb8._12_4_;
        x_00[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
        x_00[6] = (float)(int)in_stack_fffffffffffffed0;
        x_00[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
        x_00[8] = (float)(int)in_stack_fffffffffffffed8;
        x_00[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
        x_00[10] = (float)(int)in_stack_fffffffffffffee0;
        x_00[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        x_00[0xc] = (float)(int)in_stack_fffffffffffffee8;
        x_00[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
        x_00[0xe] = (float)(int)in_stack_fffffffffffffef0;
        x_00[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
        atan2512_ps(__return_storage_ptr__,y_00,x_00);
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1594;
        uVar279 = uVar279 + 0x10;
      }
      auVar287 = ZEXT816(0) << 0x40;
      auVar774._8_4_ = 0x80000000;
      auVar774._0_8_ = 0x8000000080000000;
      auVar774._12_4_ = 0x80000000;
      auVar774._16_4_ = 0x80000000;
      auVar774._20_4_ = 0x80000000;
      auVar774._24_4_ = 0x80000000;
      auVar774._28_4_ = 0x80000000;
      auVar850._8_4_ = 0x40490fdb;
      auVar850._0_8_ = 0x40490fdb40490fdb;
      auVar850._12_4_ = 0x40490fdb;
      auVar850._16_4_ = 0x40490fdb;
      auVar850._20_4_ = 0x40490fdb;
      auVar850._24_4_ = 0x40490fdb;
      auVar850._28_4_ = 0x40490fdb;
      auVar933._8_4_ = 0x7fffffff;
      auVar933._0_8_ = 0x7fffffff7fffffff;
      auVar933._12_4_ = 0x7fffffff;
      auVar933._16_4_ = 0x7fffffff;
      auVar933._20_4_ = 0x7fffffff;
      auVar933._24_4_ = 0x7fffffff;
      auVar933._28_4_ = 0x7fffffff;
      auVar991._8_4_ = 0x3f800000;
      auVar991._0_8_ = 0x3f8000003f800000;
      auVar991._12_4_ = 0x3f800000;
      auVar991._16_4_ = 0x3f800000;
      auVar991._20_4_ = 0x3f800000;
      auVar991._24_4_ = 0x3f800000;
      auVar991._28_4_ = 0x3f800000;
      auVar1045._8_4_ = 0xbc83a25c;
      auVar1045._0_8_ = 0xbc83a25cbc83a25c;
      auVar1045._12_4_ = 0xbc83a25c;
      auVar1045._16_4_ = 0xbc83a25c;
      auVar1045._20_4_ = 0xbc83a25c;
      auVar1045._24_4_ = 0xbc83a25c;
      auVar1045._28_4_ = 0xbc83a25c;
      auVar1100._8_4_ = 0xbd99b01e;
      auVar1100._0_8_ = 0xbd99b01ebd99b01e;
      auVar1100._12_4_ = 0xbd99b01e;
      auVar1100._16_4_ = 0xbd99b01e;
      auVar1100._20_4_ = 0xbd99b01e;
      auVar1100._24_4_ = 0xbd99b01e;
      auVar1100._28_4_ = 0xbd99b01e;
      auVar1151._8_4_ = 0xbe117200;
      auVar1151._0_8_ = 0xbe117200be117200;
      auVar1151._12_4_ = 0xbe117200;
      auVar1151._16_4_ = 0xbe117200;
      auVar1151._20_4_ = 0xbe117200;
      auVar1151._24_4_ = 0xbe117200;
      auVar1151._28_4_ = 0xbe117200;
      auVar1200._8_4_ = 0xbeaaaa53;
      auVar1200._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1200._12_4_ = 0xbeaaaa53;
      auVar1200._16_4_ = 0xbeaaaa53;
      auVar1200._20_4_ = 0xbeaaaa53;
      auVar1200._24_4_ = 0xbeaaaa53;
      auVar1200._28_4_ = 0xbeaaaa53;
      auVar1250._8_4_ = 0x3b3ac537;
      auVar1250._0_8_ = 0x3b3ac5373b3ac537;
      auVar1250._12_4_ = 0x3b3ac537;
      auVar1250._16_4_ = 0x3b3ac537;
      auVar1250._20_4_ = 0x3b3ac537;
      auVar1250._24_4_ = 0x3b3ac537;
      auVar1250._28_4_ = 0x3b3ac537;
      auVar1298._8_4_ = 0x3d2edd4e;
      auVar1298._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1298._12_4_ = 0x3d2edd4e;
      auVar1298._16_4_ = 0x3d2edd4e;
      auVar1298._20_4_ = 0x3d2edd4e;
      auVar1298._24_4_ = 0x3d2edd4e;
      auVar1298._28_4_ = 0x3d2edd4e;
      auVar1352._8_4_ = 0x3dd9ed24;
      auVar1352._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1352._12_4_ = 0x3dd9ed24;
      auVar1352._16_4_ = 0x3dd9ed24;
      auVar1352._20_4_ = 0x3dd9ed24;
      auVar1352._24_4_ = 0x3dd9ed24;
      auVar1352._28_4_ = 0x3dd9ed24;
      auVar1406._8_4_ = 0x3e4cb974;
      auVar1406._0_8_ = 0x3e4cb9743e4cb974;
      auVar1406._12_4_ = 0x3e4cb974;
      auVar1406._16_4_ = 0x3e4cb974;
      auVar1406._20_4_ = 0x3e4cb974;
      auVar1406._24_4_ = 0x3e4cb974;
      auVar1406._28_4_ = 0x3e4cb974;
      auVar1460._8_4_ = 0x3fc90fdb;
      auVar1460._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1460._12_4_ = 0x3fc90fdb;
      auVar1460._16_4_ = 0x3fc90fdb;
      auVar1460._20_4_ = 0x3fc90fdb;
      auVar1460._24_4_ = 0x3fc90fdb;
      auVar1460._28_4_ = 0x3fc90fdb;
      auVar1513._8_4_ = 0x40490fdb;
      auVar1513._0_8_ = 0x40490fdb40490fdb;
      auVar1513._12_4_ = 0x40490fdb;
      auVar1513._16_4_ = 0x40490fdb;
      auVar1513._20_4_ = 0x40490fdb;
      auVar1513._24_4_ = 0x40490fdb;
      auVar1513._28_4_ = 0x40490fdb;
      auVar1566._8_4_ = 0x3fc90fdb;
      auVar1566._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1566._12_4_ = 0x3fc90fdb;
      auVar1566._16_4_ = 0x3fc90fdb;
      auVar1566._20_4_ = 0x3fc90fdb;
      auVar1566._24_4_ = 0x3fc90fdb;
      auVar1566._28_4_ = 0x3fc90fdb;
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar411 = *(undefined1 (*) [32])(ptr + uVar279);
        auVar495 = *(undefined1 (*) [32])(ptr1 + uVar279);
        uVar283 = vcmpps_avx512vl(auVar411,ZEXT1632(auVar287),1);
        auVar110._8_4_ = 0xc0490fdb;
        auVar110._0_8_ = 0xc0490fdbc0490fdb;
        auVar110._12_4_ = 0xc0490fdb;
        auVar110._16_4_ = 0xc0490fdb;
        auVar110._20_4_ = 0xc0490fdb;
        auVar110._24_4_ = 0xc0490fdb;
        auVar110._28_4_ = 0xc0490fdb;
        auVar444 = vblendmps_avx512vl(auVar850,auVar110);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar433._0_4_ = (uint)bVar281 * auVar444._0_4_ | (uint)!bVar281 * in_ZMM18._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar433._4_4_ = (uint)bVar281 * auVar444._4_4_ | (uint)!bVar281 * in_ZMM18._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar433._8_4_ = (uint)bVar281 * auVar444._8_4_ | (uint)!bVar281 * in_ZMM18._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar433._12_4_ = (uint)bVar281 * auVar444._12_4_ | (uint)!bVar281 * in_ZMM18._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar433._16_4_ = (uint)bVar281 * auVar444._16_4_ | (uint)!bVar281 * in_ZMM18._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar433._20_4_ = (uint)bVar281 * auVar444._20_4_ | (uint)!bVar281 * in_ZMM18._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar433._24_4_ = (uint)bVar281 * auVar444._24_4_ | (uint)!bVar281 * in_ZMM18._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar433._28_4_ = (uint)bVar281 * auVar444._28_4_ | (uint)!bVar281 * in_ZMM18._28_4_;
        in_ZMM18 = ZEXT3264(auVar433);
        auVar444 = vdivps_avx512vl(auVar411,auVar495);
        vandps_avx512vl(auVar444,auVar933);
        uVar283 = vcmpps_avx512vl(auVar991,auVar444,1);
        auVar111._8_4_ = 0xbf800000;
        auVar111._0_8_ = 0xbf800000bf800000;
        auVar111._12_4_ = 0xbf800000;
        auVar111._16_4_ = 0xbf800000;
        auVar111._20_4_ = 0xbf800000;
        auVar111._24_4_ = 0xbf800000;
        auVar111._28_4_ = 0xbf800000;
        auVar558 = vblendmps_avx512vl(auVar444,auVar111);
        bVar11 = (byte)uVar283;
        auVar434._0_4_ =
             (uint)(bVar11 & 1) * auVar558._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar434._4_4_ = (uint)bVar281 * auVar558._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar434._8_4_ = (uint)bVar281 * auVar558._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar434._12_4_ = (uint)bVar281 * auVar558._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar434._16_4_ = (uint)bVar281 * auVar558._16_4_ | (uint)!bVar281 * in_ZMM21._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar434._20_4_ = (uint)bVar281 * auVar558._20_4_ | (uint)!bVar281 * in_ZMM21._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar434._24_4_ = (uint)bVar281 * auVar558._24_4_ | (uint)!bVar281 * in_ZMM21._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar434._28_4_ = (uint)bVar281 * auVar558._28_4_ | (uint)!bVar281 * in_ZMM21._28_4_;
        uVar282 = vcmpps_avx512vl(auVar411,ZEXT1632(auVar287),4);
        auVar558 = vdivps_avx512vl(auVar434,auVar444);
        auVar435._0_4_ = (uint)(bVar11 & 1) * auVar558._0_4_ | !(bool)(bVar11 & 1) * auVar434._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar435._4_4_ = (uint)bVar281 * auVar558._4_4_ | !bVar281 * auVar434._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar435._8_4_ = (uint)bVar281 * auVar558._8_4_ | !bVar281 * auVar434._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar435._12_4_ = (uint)bVar281 * auVar558._12_4_ | !bVar281 * auVar434._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar435._16_4_ = (uint)bVar281 * auVar558._16_4_ | !bVar281 * auVar434._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar435._20_4_ = (uint)bVar281 * auVar558._20_4_ | !bVar281 * auVar434._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar435._24_4_ = (uint)bVar281 * auVar558._24_4_ | !bVar281 * auVar434._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar435._28_4_ = (uint)bVar281 * auVar558._28_4_ | !bVar281 * auVar434._28_4_;
        in_ZMM21 = ZEXT3264(auVar435);
        auVar503 = ZEXT1632(auVar287);
        uVar284 = vcmpps_avx512vl(auVar495,auVar503,4);
        uVar284 = uVar282 & uVar284;
        uVar285 = vcmpps_avx512vl(auVar495,auVar503,1);
        auVar558 = vmulps_avx512vl(auVar435,auVar435);
        auVar498 = vmulps_avx512vl(auVar558,auVar558);
        auVar499 = vfmadd213ps_avx512vl(auVar1045,auVar498,auVar1100);
        auVar499 = vfmadd213ps_avx512vl(auVar499,auVar498,auVar1151);
        auVar499 = vfmadd213ps_avx512vl(auVar499,auVar498,auVar1200);
        auVar502 = vfmadd213ps_avx512vl(auVar1250,auVar498,auVar1298);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1352);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1406);
        auVar498 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar991);
        auVar558 = vfmadd231ps_avx512vl(auVar498,auVar558,auVar499);
        auVar558 = vmulps_avx512vl(auVar558,auVar435);
        auVar498 = vaddps_avx512vl(auVar558,auVar1460);
        auVar436._0_4_ =
             (uint)(bVar11 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar558._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar436._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * auVar558._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar436._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * auVar558._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar436._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * auVar558._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar436._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * auVar558._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar436._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * auVar558._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar436._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * auVar558._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar436._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * auVar558._28_4_;
        auVar444 = vpternlogd_avx512vl(auVar436,auVar444,auVar774,0xf8);
        auVar558 = vaddps_avx512vl(auVar444,auVar433);
        bVar281 = (bool)((byte)uVar285 & 1);
        bVar14 = (bool)((byte)(uVar285 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar285 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar285 >> 3) & 1);
        bVar20 = (bool)((byte)(uVar285 >> 4) & 1);
        bVar22 = (bool)((byte)(uVar285 >> 5) & 1);
        bVar24 = (bool)((byte)(uVar285 >> 6) & 1);
        bVar29 = SUB81(uVar285 >> 7,0);
        auVar495 = vpternlogd_avx512vl(auVar495,auVar1513,auVar774,0xec);
        uVar1600 = vcmpps_avx512vl(auVar503,auVar495,2);
        bVar11 = ~((byte)uVar282 | (byte)uVar1600);
        auVar495 = vmovdqa32_avx512vl(auVar1513);
        iVar6 = (uint)(bVar11 & 1) * auVar495._0_4_;
        iVar5 = (uint)(bVar11 >> 1 & 1) * auVar495._4_4_;
        auVar437._4_4_ = iVar5;
        auVar437._0_4_ = iVar6;
        iVar4 = (uint)(bVar11 >> 2 & 1) * auVar495._8_4_;
        auVar437._8_4_ = iVar4;
        iVar3 = (uint)(bVar11 >> 3 & 1) * auVar495._12_4_;
        auVar437._12_4_ = iVar3;
        iVar2 = (uint)(bVar11 >> 4 & 1) * auVar495._16_4_;
        auVar437._16_4_ = iVar2;
        iVar276 = (uint)(bVar11 >> 5 & 1) * auVar495._20_4_;
        auVar437._20_4_ = iVar276;
        iVar1 = (uint)(bVar11 >> 6 & 1) * auVar495._24_4_;
        auVar437._24_4_ = iVar1;
        iVar278 = (uint)(bVar11 >> 7) * auVar495._28_4_;
        auVar437._28_4_ = iVar278;
        auVar411 = vpternlogd_avx512vl(auVar411,auVar437,auVar774,0xec);
        auVar411 = vpord_avx512vl(auVar411,auVar1566);
        bVar12 = (bool)((byte)uVar282 & 1);
        bVar15 = (bool)((byte)(uVar282 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar282 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar282 >> 3) & 1);
        bVar21 = (bool)((byte)(uVar282 >> 4) & 1);
        bVar23 = (bool)((byte)(uVar282 >> 5) & 1);
        bVar25 = (bool)((byte)(uVar282 >> 6) & 1);
        bVar30 = SUB81(uVar282 >> 7,0);
        bVar13 = (bool)((byte)uVar284 & 1);
        auVar438._0_4_ =
             (uint)bVar13 * ((uint)bVar281 * auVar558._0_4_ | (uint)!bVar281 * auVar444._0_4_) |
             (uint)!bVar13 * ((uint)bVar12 * auVar411._0_4_ | (uint)!bVar12 * iVar6);
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar438._4_4_ =
             (uint)bVar281 * ((uint)bVar14 * auVar558._4_4_ | (uint)!bVar14 * auVar444._4_4_) |
             (uint)!bVar281 * ((uint)bVar15 * auVar411._4_4_ | (uint)!bVar15 * iVar5);
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar438._8_4_ =
             (uint)bVar281 * ((uint)bVar16 * auVar558._8_4_ | (uint)!bVar16 * auVar444._8_4_) |
             (uint)!bVar281 * ((uint)bVar17 * auVar411._8_4_ | (uint)!bVar17 * iVar4);
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar438._12_4_ =
             (uint)bVar281 * ((uint)bVar18 * auVar558._12_4_ | (uint)!bVar18 * auVar444._12_4_) |
             (uint)!bVar281 * ((uint)bVar19 * auVar411._12_4_ | (uint)!bVar19 * iVar3);
        bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
        auVar438._16_4_ =
             (uint)bVar281 * ((uint)bVar20 * auVar558._16_4_ | (uint)!bVar20 * auVar444._16_4_) |
             (uint)!bVar281 * ((uint)bVar21 * auVar411._16_4_ | (uint)!bVar21 * iVar2);
        bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
        auVar438._20_4_ =
             (uint)bVar281 * ((uint)bVar22 * auVar558._20_4_ | (uint)!bVar22 * auVar444._20_4_) |
             (uint)!bVar281 * ((uint)bVar23 * auVar411._20_4_ | (uint)!bVar23 * iVar276);
        bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
        auVar438._24_4_ =
             (uint)bVar281 * ((uint)bVar24 * auVar558._24_4_ | (uint)!bVar24 * auVar444._24_4_) |
             (uint)!bVar281 * ((uint)bVar25 * auVar411._24_4_ | (uint)!bVar25 * iVar1);
        bVar281 = SUB81(uVar284 >> 7,0);
        auVar438._28_4_ =
             (uint)bVar281 * ((uint)bVar29 * auVar558._28_4_ | (uint)!bVar29 * auVar444._28_4_) |
             (uint)!bVar281 * ((uint)bVar30 * auVar411._28_4_ | (uint)!bVar30 * iVar278);
        *(undefined1 (*) [32])(outptr + uVar279) = auVar438;
      }
      auVar287 = ZEXT416(0) << 0x40;
      auVar733._8_4_ = 0x80000000;
      auVar733._0_8_ = 0x8000000080000000;
      auVar733._12_4_ = 0x80000000;
      auVar819._8_4_ = 0x40490fdb;
      auVar819._0_8_ = 0x40490fdb40490fdb;
      auVar819._12_4_ = 0x40490fdb;
      auVar911._8_4_ = 0x7fffffff;
      auVar911._0_8_ = 0x7fffffff7fffffff;
      auVar911._12_4_ = 0x7fffffff;
      auVar964._8_4_ = 0x3f800000;
      auVar964._0_8_ = 0x3f8000003f800000;
      auVar964._12_4_ = 0x3f800000;
      auVar1022._8_4_ = 0xbc83a25c;
      auVar1022._0_8_ = 0xbc83a25cbc83a25c;
      auVar1022._12_4_ = 0xbc83a25c;
      auVar1077._8_4_ = 0xbd99b01e;
      auVar1077._0_8_ = 0xbd99b01ebd99b01e;
      auVar1077._12_4_ = 0xbd99b01e;
      auVar1130._8_4_ = 0xbe117200;
      auVar1130._0_8_ = 0xbe117200be117200;
      auVar1130._12_4_ = 0xbe117200;
      auVar1177._8_4_ = 0xbeaaaa53;
      auVar1177._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1177._12_4_ = 0xbeaaaa53;
      auVar1227._8_4_ = 0x3b3ac537;
      auVar1227._0_8_ = 0x3b3ac5373b3ac537;
      auVar1227._12_4_ = 0x3b3ac537;
      auVar1275._8_4_ = 0x3d2edd4e;
      auVar1275._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1275._12_4_ = 0x3d2edd4e;
      auVar1329._8_4_ = 0x3dd9ed24;
      auVar1329._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1329._12_4_ = 0x3dd9ed24;
      auVar1383._8_4_ = 0x3e4cb974;
      auVar1383._0_8_ = 0x3e4cb9743e4cb974;
      auVar1383._12_4_ = 0x3e4cb974;
      auVar1437._8_4_ = 0x3fc90fdb;
      auVar1437._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1437._12_4_ = 0x3fc90fdb;
      auVar1491._8_4_ = 0x40490fdb;
      auVar1491._0_8_ = 0x40490fdb40490fdb;
      auVar1491._12_4_ = 0x40490fdb;
      auVar1544._8_4_ = 0x3fc90fdb;
      auVar1544._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1544._12_4_ = 0x3fc90fdb;
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar350 = *(undefined1 (*) [16])(ptr + uVar279);
        auVar351 = *(undefined1 (*) [16])(ptr1 + uVar279);
        uVar283 = vcmpps_avx512vl(auVar350,auVar287,1);
        auVar47._8_4_ = 0xc0490fdb;
        auVar47._0_8_ = 0xc0490fdbc0490fdb;
        auVar47._12_4_ = 0xc0490fdb;
        auVar354 = vblendmps_avx512vl(auVar819,auVar47);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar309._0_4_ = (uint)bVar281 * auVar354._0_4_ | (uint)!bVar281 * in_ZMM18._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar309._4_4_ = (uint)bVar281 * auVar354._4_4_ | (uint)!bVar281 * in_ZMM18._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar309._8_4_ = (uint)bVar281 * auVar354._8_4_ | (uint)!bVar281 * in_ZMM18._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar309._12_4_ = (uint)bVar281 * auVar354._12_4_ | (uint)!bVar281 * in_ZMM18._12_4_;
        in_ZMM18 = ZEXT1664(auVar309);
        uVar283 = vcmpps_avx512vl(auVar350,auVar287,4);
        uVar282 = vcmpps_avx512vl(auVar351,auVar287,4);
        uVar282 = uVar283 & uVar282;
        auVar354 = vdivps_avx512vl(auVar350,auVar351);
        auVar355 = vandps_avx512vl(auVar354,auVar911);
        uVar284 = vcmpps_avx512vl(auVar964,auVar355,1);
        auVar48._8_4_ = 0xbf800000;
        auVar48._0_8_ = 0xbf800000bf800000;
        auVar48._12_4_ = 0xbf800000;
        auVar356 = vblendmps_avx512vl(auVar355,auVar48);
        bVar11 = (byte)uVar284;
        auVar310._0_4_ =
             (uint)(bVar11 & 1) * auVar356._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar310._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar310._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar310._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
        uVar285 = vcmpps_avx512vl(auVar351,auVar287,1);
        auVar355 = vdivps_avx512vl(auVar310,auVar355);
        auVar311._0_4_ = (uint)(bVar11 & 1) * auVar355._0_4_ | !(bool)(bVar11 & 1) * auVar310._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar311._4_4_ = (uint)bVar281 * auVar355._4_4_ | !bVar281 * auVar310._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar311._8_4_ = (uint)bVar281 * auVar355._8_4_ | !bVar281 * auVar310._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar311._12_4_ = (uint)bVar281 * auVar355._12_4_ | !bVar281 * auVar310._12_4_;
        in_ZMM21 = ZEXT1664(auVar311);
        auVar355 = vmulps_avx512vl(auVar311,auVar311);
        auVar356 = vmulps_avx512vl(auVar355,auVar355);
        auVar359 = vfmadd213ps_avx512vl(auVar1022,auVar356,auVar1077);
        auVar359 = vfmadd213ps_avx512vl(auVar359,auVar356,auVar1130);
        auVar359 = vfmadd213ps_avx512vl(auVar359,auVar356,auVar1177);
        auVar360 = vfmadd213ps_avx512vl(auVar1227,auVar356,auVar1275);
        auVar360 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1329);
        auVar360 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1383);
        auVar356 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar964);
        auVar355 = vfmadd231ps_avx512vl(auVar356,auVar355,auVar359);
        auVar355 = vmulps_avx512vl(auVar355,auVar311);
        auVar356 = vaddps_avx512vl(auVar355,auVar1437);
        auVar312._0_4_ =
             (uint)(bVar11 & 1) * auVar356._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar355._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar312._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * auVar355._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar312._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * auVar355._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar312._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * auVar355._12_4_;
        auVar354 = vpternlogd_avx512vl(auVar312,auVar354,auVar733,0xf8);
        auVar355 = vaddps_avx512vl(auVar354,auVar309);
        bVar281 = (bool)((byte)uVar285 & 1);
        bVar14 = (bool)((byte)(uVar285 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar285 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar351 = vpternlogd_avx512vl(auVar351,auVar1491,auVar733,0xec);
        uVar1600 = vcmpps_avx512vl(auVar287,auVar351,2);
        uVar34 = ~((ushort)uVar283 | (ushort)uVar1600);
        auVar351 = vmovdqa32_avx512vl(auVar1491);
        iVar2 = (uint)((byte)uVar34 & 1) * auVar351._0_4_;
        iVar276 = (uint)((byte)(uVar34 >> 1) & 1) * auVar351._4_4_;
        auVar313._4_4_ = iVar276;
        auVar313._0_4_ = iVar2;
        iVar278 = (uint)((byte)(uVar34 >> 2) & 1) * auVar351._8_4_;
        auVar313._8_4_ = iVar278;
        iVar1 = (uint)((byte)(uVar34 >> 3) & 1) * auVar351._12_4_;
        auVar313._12_4_ = iVar1;
        auVar350 = vpternlogd_avx512vl(auVar350,auVar313,auVar733,0xec);
        auVar350 = vpord_avx512vl(auVar350,auVar1544);
        bVar12 = (bool)((byte)uVar283 & 1);
        bVar15 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar283 >> 3) & 1);
        bVar13 = (bool)((byte)uVar282 & 1);
        auVar314._0_4_ =
             (uint)bVar13 * ((uint)bVar281 * auVar355._0_4_ | (uint)!bVar281 * auVar354._0_4_) |
             (uint)!bVar13 * ((uint)bVar12 * auVar350._0_4_ | (uint)!bVar12 * iVar2);
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar314._4_4_ =
             (uint)bVar281 * ((uint)bVar14 * auVar355._4_4_ | (uint)!bVar14 * auVar354._4_4_) |
             (uint)!bVar281 * ((uint)bVar15 * auVar350._4_4_ | (uint)!bVar15 * iVar276);
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar314._8_4_ =
             (uint)bVar281 * ((uint)bVar16 * auVar355._8_4_ | (uint)!bVar16 * auVar354._8_4_) |
             (uint)!bVar281 * ((uint)bVar17 * auVar350._8_4_ | (uint)!bVar17 * iVar278);
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar314._12_4_ =
             (uint)bVar281 * ((uint)bVar18 * auVar355._12_4_ | (uint)!bVar18 * auVar354._12_4_) |
             (uint)!bVar281 * ((uint)bVar19 * auVar350._12_4_ | (uint)!bVar19 * iVar1);
        *(undefined1 (*) [16])(outptr + uVar279) = auVar314;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        pfVar1601 = outptr;
        fVar666 = atan2f(*(float *)((long)ptr + uVar279 * 4 + lVar280),
                         *(float *)((long)pfVar1599 + uVar279 * 4 + lVar280));
        *(float *)((long)outptr + uVar279 * 4 + lVar280) = fVar666;
        lVar280 = lVar280 + 4;
        outptr = pfVar1601;
      }
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_00382268;
      fVar666 = *ptr;
      auVar1597 = (undefined1  [12])0x0;
      if (iVar276 == 4) {
        auVar411 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])ptr);
        auVar1595 = ZEXT3264(auVar411);
        auVar287 = vmovdqa64_avx512vl(auVar411._0_16_);
        auVar1594 = ZEXT1664(auVar287);
      }
      else {
        auVar287 = vpbroadcastd_avx512vl(ZEXT416((uint)fVar666));
        auVar1594 = ZEXT1664(auVar287);
        if (iVar276 == 8) {
          auVar411 = vmovdqu64_avx512vl(*(undefined1 (*) [32])ptr);
          auVar1595 = ZEXT3264(auVar411);
        }
        else {
          auVar411 = vpbroadcastd_avx512vl(auVar287);
          auVar1595 = ZEXT3264(auVar411);
          if (iVar276 == 0x10) {
            auVar632 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_0038bf56;
          }
        }
      }
      auVar632 = vinserti64x4_avx512f(auVar1595,auVar1595._0_32_,1);
LAB_0038bf56:
      auVar632 = vmovdqu64_avx512f(auVar632);
      uVar279 = 0;
      auVar287 = vmovdqa64_avx512vl(auVar1594._0_16_);
      auVar573 = vmovdqu64_avx512f(auVar1595);
      pfVar1599 = ptr1;
      while( true ) {
        auVar350 = auVar1594._0_16_;
        if (iVar277 <= (int)uVar279 + 0xf) break;
        auVar1595 = vmovdqu64_avx512f(auVar632);
        y_18[1] = (float)auVar1597._0_4_;
        y_18[2] = (float)auVar1597._4_4_;
        y_18[3] = (float)auVar1597._8_4_;
        y_18[0] = fVar666;
        y_18._16_8_ = outptr;
        y_18[6] = (float)(int)in_stack_fffffffffffffe90;
        y_18[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
        y_18[8] = (float)in_stack_fffffffffffffe98._0_4_;
        y_18[9] = (float)in_stack_fffffffffffffe98._4_4_;
        y_18[10] = (float)in_stack_fffffffffffffe98._8_4_;
        y_18[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
        y_18[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
        y_18[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
        y_18[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
        y_18[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
        x_18[4] = (float)(int)pfVar1599;
        x_18[0] = (float)in_stack_fffffffffffffeb8._0_4_;
        x_18[1] = (float)in_stack_fffffffffffffeb8._4_4_;
        x_18[2] = (float)in_stack_fffffffffffffeb8._8_4_;
        x_18[3] = (float)in_stack_fffffffffffffeb8._12_4_;
        x_18[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
        x_18[6] = (float)(int)in_stack_fffffffffffffed0;
        x_18[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
        x_18[8] = (float)(int)in_stack_fffffffffffffed8;
        x_18[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
        x_18[10] = (float)(int)in_stack_fffffffffffffee0;
        x_18[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        x_18[0xc] = (float)(int)in_stack_fffffffffffffee8;
        x_18[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
        x_18[0xe] = (float)(int)in_stack_fffffffffffffef0;
        x_18[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
        atan2512_ps(__return_storage_ptr__,y_18,x_18);
        auVar1594 = ZEXT1664(auVar287);
        auVar1595 = vmovdqu64_avx512f(auVar1595);
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
        uVar279 = uVar279 + 0x10;
        auVar1595 = auVar573;
      }
      auVar114._8_4_ = 0x80000000;
      auVar114._0_8_ = 0x8000000080000000;
      auVar114._12_4_ = 0x80000000;
      auVar114._16_4_ = 0x80000000;
      auVar114._20_4_ = 0x80000000;
      auVar114._24_4_ = 0x80000000;
      auVar114._28_4_ = 0x80000000;
      auVar558 = auVar1595._0_32_;
      auVar411 = vpandd_avx512vl(auVar558,auVar114);
      auVar444 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      uVar283 = vcmpps_avx512vl(auVar558,auVar444,4);
      uVar282 = vcmpps_avx512vl(auVar558,auVar444,1);
      auVar495 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
      bVar281 = (bool)((byte)uVar282 & 1);
      auVar568._0_4_ = (uint)bVar281 * auVar495._0_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
      auVar568._4_4_ = (uint)bVar281 * auVar495._4_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
      auVar568._8_4_ = (uint)bVar281 * auVar495._8_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
      auVar568._12_4_ = (uint)bVar281 * auVar495._12_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
      auVar568._16_4_ = (uint)bVar281 * auVar495._16_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
      auVar568._20_4_ = (uint)bVar281 * auVar495._20_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
      auVar568._24_4_ = (uint)bVar281 * auVar495._24_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = SUB81(uVar282 >> 7,0);
      auVar568._28_4_ = (uint)bVar281 * auVar495._28_4_ | (uint)!bVar281 * 0x40490fdb;
      auVar115._8_4_ = 0x3fc90fdb;
      auVar115._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar115._12_4_ = 0x3fc90fdb;
      auVar115._16_4_ = 0x3fc90fdb;
      auVar115._20_4_ = 0x3fc90fdb;
      auVar115._24_4_ = 0x3fc90fdb;
      auVar115._28_4_ = 0x3fc90fdb;
      auVar411 = vpord_avx512vl(auVar411,auVar115);
      auVar569._4_4_ = (uint)((byte)(uVar283 >> 1) & 1) * auVar411._4_4_;
      auVar569._0_4_ = (uint)((byte)uVar283 & 1) * auVar411._0_4_;
      auVar569._8_4_ = (uint)((byte)(uVar283 >> 2) & 1) * auVar411._8_4_;
      auVar569._12_4_ = (uint)((byte)(uVar283 >> 3) & 1) * auVar411._12_4_;
      auVar569._16_4_ = (uint)((byte)(uVar283 >> 4) & 1) * auVar411._16_4_;
      auVar569._20_4_ = (uint)((byte)(uVar283 >> 5) & 1) * auVar411._20_4_;
      auVar569._24_4_ = (uint)((byte)(uVar283 >> 6) & 1) * auVar411._24_4_;
      auVar569._28_4_ = (uint)(byte)(uVar283 >> 7) * auVar411._28_4_;
      auVar958._8_4_ = 0x80000000;
      auVar958._0_8_ = 0x8000000080000000;
      auVar958._12_4_ = 0x80000000;
      auVar958._16_4_ = 0x80000000;
      auVar958._20_4_ = 0x80000000;
      auVar958._24_4_ = 0x80000000;
      auVar958._28_4_ = 0x80000000;
      auVar1019._8_4_ = 0x7fffffff;
      auVar1019._0_8_ = 0x7fffffff7fffffff;
      auVar1019._12_4_ = 0x7fffffff;
      auVar1019._16_4_ = 0x7fffffff;
      auVar1019._20_4_ = 0x7fffffff;
      auVar1019._24_4_ = 0x7fffffff;
      auVar1019._28_4_ = 0x7fffffff;
      auVar1074._8_4_ = 0x3f800000;
      auVar1074._0_8_ = 0x3f8000003f800000;
      auVar1074._12_4_ = 0x3f800000;
      auVar1074._16_4_ = 0x3f800000;
      auVar1074._20_4_ = 0x3f800000;
      auVar1074._24_4_ = 0x3f800000;
      auVar1074._28_4_ = 0x3f800000;
      auVar1127._8_4_ = 0xbc83a25c;
      auVar1127._0_8_ = 0xbc83a25cbc83a25c;
      auVar1127._12_4_ = 0xbc83a25c;
      auVar1127._16_4_ = 0xbc83a25c;
      auVar1127._20_4_ = 0xbc83a25c;
      auVar1127._24_4_ = 0xbc83a25c;
      auVar1127._28_4_ = 0xbc83a25c;
      auVar1174._8_4_ = 0xbd99b01e;
      auVar1174._0_8_ = 0xbd99b01ebd99b01e;
      auVar1174._12_4_ = 0xbd99b01e;
      auVar1174._16_4_ = 0xbd99b01e;
      auVar1174._20_4_ = 0xbd99b01e;
      auVar1174._24_4_ = 0xbd99b01e;
      auVar1174._28_4_ = 0xbd99b01e;
      auVar1224._8_4_ = 0xbe117200;
      auVar1224._0_8_ = 0xbe117200be117200;
      auVar1224._12_4_ = 0xbe117200;
      auVar1224._16_4_ = 0xbe117200;
      auVar1224._20_4_ = 0xbe117200;
      auVar1224._24_4_ = 0xbe117200;
      auVar1224._28_4_ = 0xbe117200;
      auVar1272._8_4_ = 0xbeaaaa53;
      auVar1272._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1272._12_4_ = 0xbeaaaa53;
      auVar1272._16_4_ = 0xbeaaaa53;
      auVar1272._20_4_ = 0xbeaaaa53;
      auVar1272._24_4_ = 0xbeaaaa53;
      auVar1272._28_4_ = 0xbeaaaa53;
      auVar1326._8_4_ = 0x3b3ac537;
      auVar1326._0_8_ = 0x3b3ac5373b3ac537;
      auVar1326._12_4_ = 0x3b3ac537;
      auVar1326._16_4_ = 0x3b3ac537;
      auVar1326._20_4_ = 0x3b3ac537;
      auVar1326._24_4_ = 0x3b3ac537;
      auVar1326._28_4_ = 0x3b3ac537;
      auVar1380._8_4_ = 0x3d2edd4e;
      auVar1380._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1380._12_4_ = 0x3d2edd4e;
      auVar1380._16_4_ = 0x3d2edd4e;
      auVar1380._20_4_ = 0x3d2edd4e;
      auVar1380._24_4_ = 0x3d2edd4e;
      auVar1380._28_4_ = 0x3d2edd4e;
      auVar1434._8_4_ = 0x3dd9ed24;
      auVar1434._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1434._12_4_ = 0x3dd9ed24;
      auVar1434._16_4_ = 0x3dd9ed24;
      auVar1434._20_4_ = 0x3dd9ed24;
      auVar1434._24_4_ = 0x3dd9ed24;
      auVar1434._28_4_ = 0x3dd9ed24;
      auVar1488._8_4_ = 0x3e4cb974;
      auVar1488._0_8_ = 0x3e4cb9743e4cb974;
      auVar1488._12_4_ = 0x3e4cb974;
      auVar1488._16_4_ = 0x3e4cb974;
      auVar1488._20_4_ = 0x3e4cb974;
      auVar1488._24_4_ = 0x3e4cb974;
      auVar1488._28_4_ = 0x3e4cb974;
      auVar1541._8_4_ = 0x3fc90fdb;
      auVar1541._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1541._12_4_ = 0x3fc90fdb;
      auVar1541._16_4_ = 0x3fc90fdb;
      auVar1541._20_4_ = 0x3fc90fdb;
      auVar1541._24_4_ = 0x3fc90fdb;
      auVar1541._28_4_ = 0x3fc90fdb;
      auVar1593._8_4_ = 0x40490fdb;
      auVar1593._0_8_ = 0x40490fdb40490fdb;
      auVar1593._12_4_ = 0x40490fdb;
      auVar1593._16_4_ = 0x40490fdb;
      auVar1593._20_4_ = 0x40490fdb;
      auVar1593._24_4_ = 0x40490fdb;
      auVar1593._28_4_ = 0x40490fdb;
      auVar411 = vpord_avx512vl(auVar569,auVar1593);
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar495 = *(undefined1 (*) [32])(ptr1 + uVar279);
        uVar282 = vcmpps_avx512vl(auVar495,auVar444,4);
        uVar282 = uVar283 & uVar282;
        auVar498 = vdivps_avx512vl(auVar558,auVar495);
        vandps_avx512vl(auVar498,auVar1019);
        uVar284 = vcmpps_avx512vl(auVar1074,auVar498,1);
        auVar116._8_4_ = 0xbf800000;
        auVar116._0_8_ = 0xbf800000bf800000;
        auVar116._12_4_ = 0xbf800000;
        auVar116._16_4_ = 0xbf800000;
        auVar116._20_4_ = 0xbf800000;
        auVar116._24_4_ = 0xbf800000;
        auVar116._28_4_ = 0xbf800000;
        auVar499 = vblendmps_avx512vl(auVar498,auVar116);
        bVar11 = (byte)uVar284;
        auVar570._0_4_ =
             (uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM20._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar570._4_4_ = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * in_ZMM20._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar570._8_4_ = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * in_ZMM20._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar570._12_4_ = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * in_ZMM20._12_4_;
        bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
        auVar570._16_4_ = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * in_ZMM20._16_4_;
        bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
        auVar570._20_4_ = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * in_ZMM20._20_4_;
        bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
        auVar570._24_4_ = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * in_ZMM20._24_4_;
        bVar281 = SUB81(uVar284 >> 7,0);
        auVar570._28_4_ = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * in_ZMM20._28_4_;
        uVar285 = vcmpps_avx512vl(auVar495,auVar444,1);
        auVar499 = vdivps_avx512vl(auVar570,auVar498);
        auVar571._0_4_ = (uint)(bVar11 & 1) * auVar499._0_4_ | !(bool)(bVar11 & 1) * auVar570._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar571._4_4_ = (uint)bVar281 * auVar499._4_4_ | !bVar281 * auVar570._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar571._8_4_ = (uint)bVar281 * auVar499._8_4_ | !bVar281 * auVar570._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar571._12_4_ = (uint)bVar281 * auVar499._12_4_ | !bVar281 * auVar570._12_4_;
        bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
        auVar571._16_4_ = (uint)bVar281 * auVar499._16_4_ | !bVar281 * auVar570._16_4_;
        bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
        auVar571._20_4_ = (uint)bVar281 * auVar499._20_4_ | !bVar281 * auVar570._20_4_;
        bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
        auVar571._24_4_ = (uint)bVar281 * auVar499._24_4_ | !bVar281 * auVar570._24_4_;
        bVar281 = SUB81(uVar284 >> 7,0);
        auVar571._28_4_ = (uint)bVar281 * auVar499._28_4_ | !bVar281 * auVar570._28_4_;
        in_ZMM20 = ZEXT3264(auVar571);
        auVar499 = vmulps_avx512vl(auVar571,auVar571);
        auVar502 = vmulps_avx512vl(auVar499,auVar499);
        auVar503 = vfmadd213ps_avx512vl(auVar1127,auVar502,auVar1174);
        auVar503 = vfmadd213ps_avx512vl(auVar503,auVar502,auVar1224);
        auVar503 = vfmadd213ps_avx512vl(auVar503,auVar502,auVar1272);
        auVar504 = vfmadd213ps_avx512vl(auVar1326,auVar502,auVar1380);
        auVar504 = vfmadd213ps_avx512vl(auVar504,auVar502,auVar1434);
        auVar504 = vfmadd213ps_avx512vl(auVar504,auVar502,auVar1488);
        auVar502 = vfmadd213ps_avx512vl(auVar504,auVar502,auVar1074);
        auVar499 = vfmadd231ps_avx512vl(auVar502,auVar499,auVar503);
        auVar499 = vmulps_avx512vl(auVar499,auVar571);
        auVar502 = vaddps_avx512vl(auVar499,auVar1541);
        auVar572._0_4_ =
             (uint)(bVar11 & 1) * auVar502._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar499._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar572._4_4_ = (uint)bVar281 * auVar502._4_4_ | (uint)!bVar281 * auVar499._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar572._8_4_ = (uint)bVar281 * auVar502._8_4_ | (uint)!bVar281 * auVar499._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar572._12_4_ = (uint)bVar281 * auVar502._12_4_ | (uint)!bVar281 * auVar499._12_4_;
        bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
        auVar572._16_4_ = (uint)bVar281 * auVar502._16_4_ | (uint)!bVar281 * auVar499._16_4_;
        bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
        auVar572._20_4_ = (uint)bVar281 * auVar502._20_4_ | (uint)!bVar281 * auVar499._20_4_;
        bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
        auVar572._24_4_ = (uint)bVar281 * auVar502._24_4_ | (uint)!bVar281 * auVar499._24_4_;
        bVar281 = SUB81(uVar284 >> 7,0);
        auVar572._28_4_ = (uint)bVar281 * auVar502._28_4_ | (uint)!bVar281 * auVar499._28_4_;
        auVar498 = vpternlogd_avx512vl(auVar572,auVar498,auVar958,0xf8);
        auVar495 = vpternlogd_avx512vl(auVar495,auVar1593,auVar958,0xec);
        uVar1600 = vcmpps_avx512vl(auVar444,auVar495,2);
        bVar11 = (byte)uVar283 | (byte)uVar1600;
        auVar499 = vpblendmd_avx512vl(auVar411,auVar569);
        bVar13 = (bool)(bVar11 >> 1 & 1);
        bVar16 = (bool)(bVar11 >> 2 & 1);
        bVar19 = (bool)(bVar11 >> 3 & 1);
        bVar22 = (bool)(bVar11 >> 4 & 1);
        bVar25 = (bool)(bVar11 >> 5 & 1);
        bVar26 = (bool)(bVar11 >> 6 & 1);
        auVar502 = vaddps_avx512vl(auVar498,auVar568);
        bVar281 = (bool)((byte)uVar285 & 1);
        bVar14 = (bool)((byte)(uVar285 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar285 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar285 >> 3) & 1);
        bVar23 = (bool)((byte)(uVar285 >> 4) & 1);
        bVar29 = (bool)((byte)(uVar285 >> 5) & 1);
        bVar27 = (bool)((byte)(uVar285 >> 6) & 1);
        bVar31 = SUB81(uVar285 >> 7,0);
        bVar12 = (bool)((byte)uVar282 & 1);
        bVar15 = (bool)((byte)(uVar282 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar282 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar282 >> 3) & 1);
        bVar24 = (bool)((byte)(uVar282 >> 4) & 1);
        bVar30 = (bool)((byte)(uVar282 >> 5) & 1);
        bVar28 = (bool)((byte)(uVar282 >> 6) & 1);
        bVar32 = SUB81(uVar282 >> 7,0);
        pfVar1601 = outptr + uVar279;
        *pfVar1601 = (float)((uint)bVar12 *
                             ((uint)bVar281 * auVar502._0_4_ | (uint)!bVar281 * auVar498._0_4_) |
                            (uint)!bVar12 *
                            ((uint)(bVar11 & 1) * auVar499._0_4_ |
                            (uint)!(bool)(bVar11 & 1) * auVar495._0_4_));
        pfVar1601[1] = (float)((uint)bVar15 *
                               ((uint)bVar14 * auVar502._4_4_ | (uint)!bVar14 * auVar498._4_4_) |
                              (uint)!bVar15 *
                              ((uint)bVar13 * auVar499._4_4_ | (uint)!bVar13 * auVar495._4_4_));
        pfVar1601[2] = (float)((uint)bVar18 *
                               ((uint)bVar17 * auVar502._8_4_ | (uint)!bVar17 * auVar498._8_4_) |
                              (uint)!bVar18 *
                              ((uint)bVar16 * auVar499._8_4_ | (uint)!bVar16 * auVar495._8_4_));
        pfVar1601[3] = (float)((uint)bVar21 *
                               ((uint)bVar20 * auVar502._12_4_ | (uint)!bVar20 * auVar498._12_4_) |
                              (uint)!bVar21 *
                              ((uint)bVar19 * auVar499._12_4_ | (uint)!bVar19 * auVar495._12_4_));
        pfVar1601[4] = (float)((uint)bVar24 *
                               ((uint)bVar23 * auVar502._16_4_ | (uint)!bVar23 * auVar498._16_4_) |
                              (uint)!bVar24 *
                              ((uint)bVar22 * auVar499._16_4_ | (uint)!bVar22 * auVar495._16_4_));
        pfVar1601[5] = (float)((uint)bVar30 *
                               ((uint)bVar29 * auVar502._20_4_ | (uint)!bVar29 * auVar498._20_4_) |
                              (uint)!bVar30 *
                              ((uint)bVar25 * auVar499._20_4_ | (uint)!bVar25 * auVar495._20_4_));
        pfVar1601[6] = (float)((uint)bVar28 *
                               ((uint)bVar27 * auVar502._24_4_ | (uint)!bVar27 * auVar498._24_4_) |
                              (uint)!bVar28 *
                              ((uint)bVar26 * auVar499._24_4_ | (uint)!bVar26 * auVar495._24_4_));
        pfVar1601[7] = (float)((uint)bVar32 *
                               ((uint)bVar31 * auVar502._28_4_ | (uint)!bVar31 * auVar498._28_4_) |
                              (uint)!bVar32 *
                              ((uint)(bVar11 >> 7) * auVar499._28_4_ |
                              (uint)!(bool)(bVar11 >> 7) * auVar495._28_4_));
      }
      auVar51._8_4_ = 0x80000000;
      auVar51._0_8_ = 0x8000000080000000;
      auVar51._12_4_ = 0x80000000;
      auVar287 = vpandd_avx512vl(auVar350,auVar51);
      uVar283 = vcmpps_avx512vl(auVar350,(undefined1  [16])0x0,4);
      uVar282 = vcmpps_avx512vl(auVar350,(undefined1  [16])0x0,1);
      auVar351 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
      bVar281 = (bool)((byte)uVar282 & 1);
      auVar406._0_4_ = (uint)bVar281 * auVar351._0_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
      auVar406._4_4_ = (uint)bVar281 * auVar351._4_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
      auVar406._8_4_ = (uint)bVar281 * auVar351._8_4_ | (uint)!bVar281 * 0x40490fdb;
      bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
      auVar406._12_4_ = (uint)bVar281 * auVar351._12_4_ | (uint)!bVar281 * 0x40490fdb;
      auVar52._8_4_ = 0x3fc90fdb;
      auVar52._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar52._12_4_ = 0x3fc90fdb;
      auVar287 = vpord_avx512vl(auVar287,auVar52);
      auVar407._4_4_ = (uint)((byte)(uVar283 >> 1) & 1) * auVar287._4_4_;
      auVar407._0_4_ = (uint)((byte)uVar283 & 1) * auVar287._0_4_;
      auVar407._8_4_ = (uint)((byte)(uVar283 >> 2) & 1) * auVar287._8_4_;
      auVar407._12_4_ = (uint)((byte)(uVar283 >> 3) & 1) * auVar287._12_4_;
      auVar930._8_4_ = 0x80000000;
      auVar930._0_8_ = 0x8000000080000000;
      auVar930._12_4_ = 0x80000000;
      auVar988._8_4_ = 0x7fffffff;
      auVar988._0_8_ = 0x7fffffff7fffffff;
      auVar988._12_4_ = 0x7fffffff;
      auVar1042._8_4_ = 0x3f800000;
      auVar1042._0_8_ = 0x3f8000003f800000;
      auVar1042._12_4_ = 0x3f800000;
      auVar1097._8_4_ = 0xbc83a25c;
      auVar1097._0_8_ = 0xbc83a25cbc83a25c;
      auVar1097._12_4_ = 0xbc83a25c;
      auVar1150._8_4_ = 0xbd99b01e;
      auVar1150._0_8_ = 0xbd99b01ebd99b01e;
      auVar1150._12_4_ = 0xbd99b01e;
      auVar1197._8_4_ = 0xbe117200;
      auVar1197._0_8_ = 0xbe117200be117200;
      auVar1197._12_4_ = 0xbe117200;
      auVar1247._8_4_ = 0xbeaaaa53;
      auVar1247._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1247._12_4_ = 0xbeaaaa53;
      auVar1295._8_4_ = 0x3b3ac537;
      auVar1295._0_8_ = 0x3b3ac5373b3ac537;
      auVar1295._12_4_ = 0x3b3ac537;
      auVar1349._8_4_ = 0x3d2edd4e;
      auVar1349._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1349._12_4_ = 0x3d2edd4e;
      auVar1403._8_4_ = 0x3dd9ed24;
      auVar1403._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1403._12_4_ = 0x3dd9ed24;
      auVar1457._8_4_ = 0x3e4cb974;
      auVar1457._0_8_ = 0x3e4cb9743e4cb974;
      auVar1457._12_4_ = 0x3e4cb974;
      auVar1510._8_4_ = 0x3fc90fdb;
      auVar1510._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1510._12_4_ = 0x3fc90fdb;
      auVar1563._8_4_ = 0x40490fdb;
      auVar1563._0_8_ = 0x40490fdb40490fdb;
      auVar1563._12_4_ = 0x40490fdb;
      auVar287 = vpord_avx512vl(auVar407,auVar1563);
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar351 = *(undefined1 (*) [16])(ptr1 + uVar279);
        uVar282 = vcmpps_avx512vl(auVar351,(undefined1  [16])0x0,4);
        uVar282 = uVar283 & uVar282;
        uVar284 = vcmpps_avx512vl(auVar351,(undefined1  [16])0x0,1);
        auVar354 = vdivps_avx512vl(auVar350,auVar351);
        auVar355 = vandps_avx512vl(auVar354,auVar988);
        uVar285 = vcmpps_avx512vl(auVar1042,auVar355,1);
        auVar53._8_4_ = 0xbf800000;
        auVar53._0_8_ = 0xbf800000bf800000;
        auVar53._12_4_ = 0xbf800000;
        auVar356 = vblendmps_avx512vl(auVar355,auVar53);
        bVar11 = (byte)uVar285;
        auVar408._0_4_ =
             (uint)(bVar11 & 1) * auVar356._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM20._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar408._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * in_ZMM20._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar408._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * in_ZMM20._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar408._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * in_ZMM20._12_4_;
        auVar355 = vdivps_avx512vl(auVar408,auVar355);
        auVar409._0_4_ = (uint)(bVar11 & 1) * auVar355._0_4_ | !(bool)(bVar11 & 1) * auVar408._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar409._4_4_ = (uint)bVar281 * auVar355._4_4_ | !bVar281 * auVar408._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar409._8_4_ = (uint)bVar281 * auVar355._8_4_ | !bVar281 * auVar408._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar409._12_4_ = (uint)bVar281 * auVar355._12_4_ | !bVar281 * auVar408._12_4_;
        in_ZMM20 = ZEXT1664(auVar409);
        auVar355 = vmulps_avx512vl(auVar409,auVar409);
        auVar356 = vmulps_avx512vl(auVar355,auVar355);
        auVar359 = vfmadd213ps_avx512vl(auVar1097,auVar356,auVar1150);
        auVar359 = vfmadd213ps_avx512vl(auVar359,auVar356,auVar1197);
        auVar359 = vfmadd213ps_avx512vl(auVar359,auVar356,auVar1247);
        auVar360 = vfmadd213ps_avx512vl(auVar1295,auVar356,auVar1349);
        auVar360 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1403);
        auVar360 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1457);
        auVar356 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1042);
        auVar355 = vfmadd231ps_avx512vl(auVar356,auVar355,auVar359);
        auVar355 = vmulps_avx512vl(auVar355,auVar409);
        auVar356 = vaddps_avx512vl(auVar355,auVar1510);
        auVar410._0_4_ =
             (uint)(bVar11 & 1) * auVar356._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar355._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar410._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * auVar355._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar410._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * auVar355._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar410._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * auVar355._12_4_;
        auVar354 = vpternlogd_avx512vl(auVar410,auVar354,auVar930,0xf8);
        auVar351 = vpternlogd_avx512vl(auVar351,auVar1563,auVar930,0xec);
        uVar1600 = vcmpps_avx512vl((undefined1  [16])0x0,auVar351,2);
        uVar34 = (ushort)uVar283 | (ushort)uVar1600;
        auVar355 = vpblendmd_avx512vl(auVar287,auVar407);
        bVar281 = (bool)((byte)uVar34 & 1);
        bVar14 = (bool)((byte)(uVar34 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar34 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar34 >> 3) & 1);
        auVar356 = vaddps_avx512vl(auVar354,auVar406);
        bVar12 = (bool)((byte)uVar284 & 1);
        bVar15 = (bool)((byte)(uVar284 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar284 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar284 >> 3) & 1);
        bVar13 = (bool)((byte)uVar282 & 1);
        bVar16 = (bool)((byte)(uVar282 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar282 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar282 >> 3) & 1);
        pfVar1601 = outptr + uVar279;
        *pfVar1601 = (float)((uint)bVar13 *
                             ((uint)bVar12 * auVar356._0_4_ | (uint)!bVar12 * auVar354._0_4_) |
                            (uint)!bVar13 *
                            ((uint)bVar281 * auVar355._0_4_ | (uint)!bVar281 * auVar351._0_4_));
        pfVar1601[1] = (float)((uint)bVar16 *
                               ((uint)bVar15 * auVar356._4_4_ | (uint)!bVar15 * auVar354._4_4_) |
                              (uint)!bVar16 *
                              ((uint)bVar14 * auVar355._4_4_ | (uint)!bVar14 * auVar351._4_4_));
        pfVar1601[2] = (float)((uint)bVar19 *
                               ((uint)bVar18 * auVar356._8_4_ | (uint)!bVar18 * auVar354._8_4_) |
                              (uint)!bVar19 *
                              ((uint)bVar17 * auVar355._8_4_ | (uint)!bVar17 * auVar351._8_4_));
        pfVar1601[3] = (float)((uint)bVar22 *
                               ((uint)bVar21 * auVar356._12_4_ | (uint)!bVar21 * auVar354._12_4_) |
                              (uint)!bVar22 *
                              ((uint)bVar20 * auVar355._12_4_ | (uint)!bVar20 * auVar351._12_4_));
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        pfVar1601 = outptr;
        fVar667 = atan2f(fVar666,*(float *)((long)pfVar1599 + uVar279 * 4 + lVar280));
        *(float *)((long)outptr + uVar279 * 4 + lVar280) = fVar667;
        lVar280 = lVar280 + 4;
        outptr = pfVar1601;
      }
      return;
    }
    fVar666 = *ptr1;
    uVar1603 = 0;
    uVar1600 = 0;
    if (iVar276 == 4) {
      auVar411 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])ptr1);
      auVar1595 = ZEXT3264(auVar411);
      auVar287 = vmovdqa64_avx512vl(auVar411._0_16_);
      auVar1594 = ZEXT1664(auVar287);
    }
    else {
      auVar287 = vpbroadcastd_avx512vl(ZEXT416((uint)fVar666));
      auVar1594 = ZEXT1664(auVar287);
      if (iVar276 == 8) {
        auVar411 = vmovdqu64_avx512vl(*(undefined1 (*) [32])ptr1);
        auVar1595 = ZEXT3264(auVar411);
      }
      else {
        auVar411 = vpbroadcastd_avx512vl(auVar287);
        auVar1595 = ZEXT3264(auVar411);
        if (iVar276 == 0x10) {
          auVar632 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_00388328;
        }
      }
    }
    auVar632 = vinserti64x4_avx512f(auVar1595,auVar1595._0_32_,1);
LAB_00388328:
    vmovdqu64_avx512f(auVar632);
    uVar279 = 0;
    auVar287 = vmovdqa64_avx512vl(auVar1594._0_16_);
    uVar1596 = auVar287._0_4_;
    auVar1597 = auVar287._4_12_;
    auVar632 = vmovdqu64_avx512f(auVar1595);
    for (; auVar287 = auVar1594._0_16_, (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar1595 = vmovdqu64_avx512f(*(undefined1 (*) [64])(ptr + uVar279));
      y_12[1] = (float)auVar1597._0_4_;
      y_12[2] = (float)auVar1597._4_4_;
      y_12[3] = (float)auVar1597._8_4_;
      y_12[0] = (float)uVar1596;
      y_12._16_8_ = outptr;
      y_12[6] = (float)(int)in_stack_fffffffffffffe90;
      y_12[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
      y_12[8] = (float)in_stack_fffffffffffffe98._0_4_;
      y_12[9] = (float)in_stack_fffffffffffffe98._4_4_;
      y_12[10] = (float)in_stack_fffffffffffffe98._8_4_;
      y_12[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
      y_12[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
      y_12[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
      y_12[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
      y_12[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
      x_12[4] = fVar666;
      x_12[0] = (float)in_stack_fffffffffffffeb8._0_4_;
      x_12[1] = (float)in_stack_fffffffffffffeb8._4_4_;
      x_12[2] = (float)in_stack_fffffffffffffeb8._8_4_;
      x_12[3] = (float)in_stack_fffffffffffffeb8._12_4_;
      x_12[5] = (float)uVar1603;
      x_12[6] = (float)(int)uVar1600;
      x_12[7] = (float)(int)((ulong)uVar1600 >> 0x20);
      x_12[8] = (float)(int)in_stack_fffffffffffffed8;
      x_12[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      x_12[10] = (float)(int)in_stack_fffffffffffffee0;
      x_12[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
      x_12[0xc] = (float)(int)in_stack_fffffffffffffee8;
      x_12[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      x_12[0xe] = (float)(int)in_stack_fffffffffffffef0;
      x_12[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
      atan2512_ps(__return_storage_ptr__,y_12,x_12);
      auVar1594 = ZEXT1664(CONCAT124(auVar1597,uVar1596));
      auVar1595 = vmovdqu64_avx512f(auVar1595);
      *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
      auVar1595 = auVar632;
    }
    auVar713._8_4_ = 0x40490fdb;
    auVar713._0_8_ = 0x40490fdb40490fdb;
    auVar713._12_4_ = 0x40490fdb;
    auVar713._16_4_ = 0x40490fdb;
    auVar713._20_4_ = 0x40490fdb;
    auVar713._24_4_ = 0x40490fdb;
    auVar713._28_4_ = 0x40490fdb;
    auVar1004._8_4_ = 0x80000000;
    auVar1004._0_8_ = 0x8000000080000000;
    auVar1004._12_4_ = 0x80000000;
    auVar1004._16_4_ = 0x80000000;
    auVar1004._20_4_ = 0x80000000;
    auVar1004._24_4_ = 0x80000000;
    auVar1004._28_4_ = 0x80000000;
    auVar444 = auVar1595._0_32_;
    auVar411 = vpternlogd_avx512vl(auVar1004,auVar444,auVar713,0xea);
    auVar802._8_4_ = 0x3f800000;
    auVar802._0_8_ = 0x3f8000003f800000;
    auVar802._12_4_ = 0x3f800000;
    auVar802._16_4_ = 0x3f800000;
    auVar802._20_4_ = 0x3f800000;
    auVar802._24_4_ = 0x3f800000;
    auVar802._28_4_ = 0x3f800000;
    auVar495 = vdivps_avx512vl(auVar802,auVar444);
    auVar350 = ZEXT816(0) << 0x40;
    uVar1600 = vcmpps_avx512vl(ZEXT1632(auVar350),auVar411,2);
    uVar283 = vcmpps_avx512vl(auVar444,ZEXT1632(auVar350),1);
    auVar1005._8_4_ = 0x80000000;
    auVar1005._0_8_ = 0x8000000080000000;
    auVar1005._12_4_ = 0x80000000;
    auVar1005._16_4_ = 0x80000000;
    auVar1005._20_4_ = 0x80000000;
    auVar1005._24_4_ = 0x80000000;
    auVar1005._28_4_ = 0x80000000;
    auVar1063._8_4_ = 0x40490fdb;
    auVar1063._0_8_ = 0x40490fdb40490fdb;
    auVar1063._12_4_ = 0x40490fdb;
    auVar1063._16_4_ = 0x40490fdb;
    auVar1063._20_4_ = 0x40490fdb;
    auVar1063._24_4_ = 0x40490fdb;
    auVar1063._28_4_ = 0x40490fdb;
    auVar1116._8_4_ = 0x7fffffff;
    auVar1116._0_8_ = 0x7fffffff7fffffff;
    auVar1116._12_4_ = 0x7fffffff;
    auVar1116._16_4_ = 0x7fffffff;
    auVar1116._20_4_ = 0x7fffffff;
    auVar1116._24_4_ = 0x7fffffff;
    auVar1116._28_4_ = 0x7fffffff;
    auVar1163._8_4_ = 0xbc83a25c;
    auVar1163._0_8_ = 0xbc83a25cbc83a25c;
    auVar1163._12_4_ = 0xbc83a25c;
    auVar1163._16_4_ = 0xbc83a25c;
    auVar1163._20_4_ = 0xbc83a25c;
    auVar1163._24_4_ = 0xbc83a25c;
    auVar1163._28_4_ = 0xbc83a25c;
    auVar1214._8_4_ = 0xbd99b01e;
    auVar1214._0_8_ = 0xbd99b01ebd99b01e;
    auVar1214._12_4_ = 0xbd99b01e;
    auVar1214._16_4_ = 0xbd99b01e;
    auVar1214._20_4_ = 0xbd99b01e;
    auVar1214._24_4_ = 0xbd99b01e;
    auVar1214._28_4_ = 0xbd99b01e;
    auVar1264._8_4_ = 0xbe117200;
    auVar1264._0_8_ = 0xbe117200be117200;
    auVar1264._12_4_ = 0xbe117200;
    auVar1264._16_4_ = 0xbe117200;
    auVar1264._20_4_ = 0xbe117200;
    auVar1264._24_4_ = 0xbe117200;
    auVar1264._28_4_ = 0xbe117200;
    auVar1314._8_4_ = 0xbeaaaa53;
    auVar1314._0_8_ = 0xbeaaaa53beaaaa53;
    auVar1314._12_4_ = 0xbeaaaa53;
    auVar1314._16_4_ = 0xbeaaaa53;
    auVar1314._20_4_ = 0xbeaaaa53;
    auVar1314._24_4_ = 0xbeaaaa53;
    auVar1314._28_4_ = 0xbeaaaa53;
    auVar1368._8_4_ = 0x3b3ac537;
    auVar1368._0_8_ = 0x3b3ac5373b3ac537;
    auVar1368._12_4_ = 0x3b3ac537;
    auVar1368._16_4_ = 0x3b3ac537;
    auVar1368._20_4_ = 0x3b3ac537;
    auVar1368._24_4_ = 0x3b3ac537;
    auVar1368._28_4_ = 0x3b3ac537;
    auVar1422._8_4_ = 0x3d2edd4e;
    auVar1422._0_8_ = 0x3d2edd4e3d2edd4e;
    auVar1422._12_4_ = 0x3d2edd4e;
    auVar1422._16_4_ = 0x3d2edd4e;
    auVar1422._20_4_ = 0x3d2edd4e;
    auVar1422._24_4_ = 0x3d2edd4e;
    auVar1422._28_4_ = 0x3d2edd4e;
    auVar1476._8_4_ = 0x3dd9ed24;
    auVar1476._0_8_ = 0x3dd9ed243dd9ed24;
    auVar1476._12_4_ = 0x3dd9ed24;
    auVar1476._16_4_ = 0x3dd9ed24;
    auVar1476._20_4_ = 0x3dd9ed24;
    auVar1476._24_4_ = 0x3dd9ed24;
    auVar1476._28_4_ = 0x3dd9ed24;
    auVar1529._8_4_ = 0x3e4cb974;
    auVar1529._0_8_ = 0x3e4cb9743e4cb974;
    auVar1529._12_4_ = 0x3e4cb974;
    auVar1529._16_4_ = 0x3e4cb974;
    auVar1529._20_4_ = 0x3e4cb974;
    auVar1529._24_4_ = 0x3e4cb974;
    auVar1529._28_4_ = 0x3e4cb974;
    auVar1582._8_4_ = 0x3fc90fdb;
    auVar1582._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar1582._12_4_ = 0x3fc90fdb;
    auVar1582._16_4_ = 0x3fc90fdb;
    auVar1582._20_4_ = 0x3fc90fdb;
    auVar1582._24_4_ = 0x3fc90fdb;
    auVar1582._28_4_ = 0x3fc90fdb;
    auVar411 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      auVar558 = *(undefined1 (*) [32])(ptr + uVar279);
      auVar502 = ZEXT1632(auVar350);
      uVar282 = vcmpps_avx512vl(auVar558,auVar502,1);
      auVar112._8_4_ = 0xc0490fdb;
      auVar112._0_8_ = 0xc0490fdbc0490fdb;
      auVar112._12_4_ = 0xc0490fdb;
      auVar112._16_4_ = 0xc0490fdb;
      auVar112._20_4_ = 0xc0490fdb;
      auVar112._24_4_ = 0xc0490fdb;
      auVar112._28_4_ = 0xc0490fdb;
      auVar498 = vblendmps_avx512vl(auVar1063,auVar112);
      bVar281 = (bool)((byte)uVar282 & 1);
      auVar512._0_4_ = (uint)bVar281 * auVar498._0_4_ | (uint)!bVar281 * in_ZMM18._0_4_;
      bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
      auVar512._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * in_ZMM18._4_4_;
      bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
      auVar512._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * in_ZMM18._8_4_;
      bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
      auVar512._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * in_ZMM18._12_4_;
      bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
      auVar512._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * in_ZMM18._16_4_;
      bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
      auVar512._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * in_ZMM18._20_4_;
      bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
      auVar512._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * in_ZMM18._24_4_;
      bVar281 = SUB81(uVar282 >> 7,0);
      auVar512._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * in_ZMM18._28_4_;
      uVar282 = vcmpps_avx512vl(auVar558,auVar502,4);
      auVar498 = vmulps_avx512vl(auVar558,auVar495);
      vandps_avx512vl(auVar498,auVar1116);
      uVar284 = vcmpps_avx512vl(auVar802,auVar498,1);
      auVar113._8_4_ = 0xbf800000;
      auVar113._0_8_ = 0xbf800000bf800000;
      auVar113._12_4_ = 0xbf800000;
      auVar113._16_4_ = 0xbf800000;
      auVar113._20_4_ = 0xbf800000;
      auVar113._24_4_ = 0xbf800000;
      auVar113._28_4_ = 0xbf800000;
      auVar499 = vblendmps_avx512vl(auVar498,auVar113);
      bVar11 = (byte)uVar284;
      auVar513._0_4_ =
           (uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
      bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
      auVar513._4_4_ = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
      bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
      auVar513._8_4_ = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
      bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
      auVar513._12_4_ = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
      bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
      auVar513._16_4_ = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * in_ZMM21._16_4_;
      bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
      auVar513._20_4_ = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * in_ZMM21._20_4_;
      bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
      auVar513._24_4_ = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * in_ZMM21._24_4_;
      bVar281 = SUB81(uVar284 >> 7,0);
      auVar513._28_4_ = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * in_ZMM21._28_4_;
      uVar285 = vcmpps_avx512vl(auVar444,auVar502,4);
      uVar285 = uVar282 & uVar285;
      auVar499 = vdivps_avx512vl(auVar513,auVar498);
      auVar514._0_4_ = (uint)(bVar11 & 1) * auVar499._0_4_ | !(bool)(bVar11 & 1) * auVar513._0_4_;
      bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
      auVar514._4_4_ = (uint)bVar281 * auVar499._4_4_ | !bVar281 * auVar513._4_4_;
      bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
      auVar514._8_4_ = (uint)bVar281 * auVar499._8_4_ | !bVar281 * auVar513._8_4_;
      bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
      auVar514._12_4_ = (uint)bVar281 * auVar499._12_4_ | !bVar281 * auVar513._12_4_;
      bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
      auVar514._16_4_ = (uint)bVar281 * auVar499._16_4_ | !bVar281 * auVar513._16_4_;
      bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
      auVar514._20_4_ = (uint)bVar281 * auVar499._20_4_ | !bVar281 * auVar513._20_4_;
      bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
      auVar514._24_4_ = (uint)bVar281 * auVar499._24_4_ | !bVar281 * auVar513._24_4_;
      bVar281 = SUB81(uVar284 >> 7,0);
      auVar514._28_4_ = (uint)bVar281 * auVar499._28_4_ | !bVar281 * auVar513._28_4_;
      in_ZMM21 = ZEXT3264(auVar514);
      vandps_avx512vl(auVar558,auVar1005);
      auVar558 = vmulps_avx512vl(auVar514,auVar514);
      auVar499 = vmulps_avx512vl(auVar558,auVar558);
      auVar502 = vfmadd213ps_avx512vl(auVar1163,auVar499,auVar1214);
      auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1264);
      auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1314);
      auVar503 = vfmadd213ps_avx512vl(auVar1368,auVar499,auVar1422);
      auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1476);
      auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1529);
      auVar499 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar802);
      auVar558 = vfmadd231ps_avx512vl(auVar499,auVar558,auVar502);
      auVar558 = vmulps_avx512vl(auVar558,auVar514);
      auVar499 = vaddps_avx512vl(auVar558,auVar1582);
      auVar515._0_4_ =
           (uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar558._0_4_;
      bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
      auVar515._4_4_ = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * auVar558._4_4_;
      bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
      auVar515._8_4_ = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * auVar558._8_4_;
      bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
      auVar515._12_4_ = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * auVar558._12_4_;
      bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
      auVar515._16_4_ = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * auVar558._16_4_;
      bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
      auVar515._20_4_ = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * auVar558._20_4_;
      bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
      auVar515._24_4_ = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * auVar558._24_4_;
      bVar281 = SUB81(uVar284 >> 7,0);
      auVar515._28_4_ = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * auVar558._28_4_;
      auVar558 = vpternlogd_avx512vl(auVar515,auVar498,auVar1005,0xf8);
      auVar498 = vaddps_avx512vl(auVar558,auVar512);
      bVar281 = (bool)((byte)uVar283 & 1);
      bVar13 = (bool)((byte)(uVar283 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar283 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar283 >> 3) & 1);
      bVar19 = (bool)((byte)(uVar283 >> 4) & 1);
      bVar21 = (bool)((byte)(uVar283 >> 5) & 1);
      bVar23 = (bool)((byte)(uVar283 >> 6) & 1);
      bVar25 = SUB81(uVar283 >> 7,0);
      auVar499 = vorps_avx512vl(auVar514,auVar411);
      auVar516._4_4_ = (uint)((byte)(uVar282 >> 1) & 1) * auVar499._4_4_;
      auVar516._0_4_ = (uint)((byte)uVar282 & 1) * auVar499._0_4_;
      auVar516._8_4_ = (uint)((byte)(uVar282 >> 2) & 1) * auVar499._8_4_;
      auVar516._12_4_ = (uint)((byte)(uVar282 >> 3) & 1) * auVar499._12_4_;
      auVar516._16_4_ = (uint)((byte)(uVar282 >> 4) & 1) * auVar499._16_4_;
      auVar516._20_4_ = (uint)((byte)(uVar282 >> 5) & 1) * auVar499._20_4_;
      auVar516._24_4_ = (uint)((byte)(uVar282 >> 6) & 1) * auVar499._24_4_;
      auVar516._28_4_ = (uint)(byte)(uVar282 >> 7) * auVar499._28_4_;
      bVar11 = (byte)uVar282 | (byte)uVar1600;
      auVar499 = vorps_avx512vl(auVar516,auVar713);
      auVar502 = vmovdqa32_avx512vl(auVar516);
      bVar14 = (bool)(bVar11 >> 1 & 1);
      bVar16 = (bool)(bVar11 >> 2 & 1);
      bVar18 = (bool)(bVar11 >> 3 & 1);
      bVar20 = (bool)(bVar11 >> 4 & 1);
      bVar22 = (bool)(bVar11 >> 5 & 1);
      bVar24 = (bool)(bVar11 >> 6 & 1);
      bVar12 = (bool)((byte)uVar285 & 1);
      auVar517._0_4_ =
           (uint)bVar12 * ((uint)bVar281 * auVar498._0_4_ | (uint)!bVar281 * auVar558._0_4_) |
           (uint)!bVar12 *
           ((uint)(bVar11 & 1) * auVar502._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar499._0_4_);
      bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
      auVar517._4_4_ =
           (uint)bVar281 * ((uint)bVar13 * auVar498._4_4_ | (uint)!bVar13 * auVar558._4_4_) |
           (uint)!bVar281 * ((uint)bVar14 * auVar502._4_4_ | (uint)!bVar14 * auVar499._4_4_);
      bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
      auVar517._8_4_ =
           (uint)bVar281 * ((uint)bVar15 * auVar498._8_4_ | (uint)!bVar15 * auVar558._8_4_) |
           (uint)!bVar281 * ((uint)bVar16 * auVar502._8_4_ | (uint)!bVar16 * auVar499._8_4_);
      bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
      auVar517._12_4_ =
           (uint)bVar281 * ((uint)bVar17 * auVar498._12_4_ | (uint)!bVar17 * auVar558._12_4_) |
           (uint)!bVar281 * ((uint)bVar18 * auVar502._12_4_ | (uint)!bVar18 * auVar499._12_4_);
      bVar281 = (bool)((byte)(uVar285 >> 4) & 1);
      auVar517._16_4_ =
           (uint)bVar281 * ((uint)bVar19 * auVar498._16_4_ | (uint)!bVar19 * auVar558._16_4_) |
           (uint)!bVar281 * ((uint)bVar20 * auVar502._16_4_ | (uint)!bVar20 * auVar499._16_4_);
      bVar281 = (bool)((byte)(uVar285 >> 5) & 1);
      auVar517._20_4_ =
           (uint)bVar281 * ((uint)bVar21 * auVar498._20_4_ | (uint)!bVar21 * auVar558._20_4_) |
           (uint)!bVar281 * ((uint)bVar22 * auVar502._20_4_ | (uint)!bVar22 * auVar499._20_4_);
      bVar281 = (bool)((byte)(uVar285 >> 6) & 1);
      auVar517._24_4_ =
           (uint)bVar281 * ((uint)bVar23 * auVar498._24_4_ | (uint)!bVar23 * auVar558._24_4_) |
           (uint)!bVar281 * ((uint)bVar24 * auVar502._24_4_ | (uint)!bVar24 * auVar499._24_4_);
      bVar281 = SUB81(uVar285 >> 7,0);
      auVar517._28_4_ =
           (uint)bVar281 * ((uint)bVar25 * auVar498._28_4_ | (uint)!bVar25 * auVar558._28_4_) |
           (uint)!bVar281 *
           ((uint)(bVar11 >> 7) * auVar502._28_4_ | (uint)!(bool)(bVar11 >> 7) * auVar499._28_4_);
      in_ZMM18 = ZEXT3264(auVar517);
      *(undefined1 (*) [32])(outptr + uVar279) = auVar517;
    }
    auVar683._8_4_ = 0x40490fdb;
    auVar683._0_8_ = 0x40490fdb40490fdb;
    auVar683._12_4_ = 0x40490fdb;
    auVar978._8_4_ = 0x80000000;
    auVar978._0_8_ = 0x8000000080000000;
    auVar978._12_4_ = 0x80000000;
    auVar350 = vpternlogd_avx512vl(auVar978,auVar287,auVar683,0xea);
    auVar761._8_4_ = 0x3f800000;
    auVar761._0_8_ = 0x3f8000003f800000;
    auVar761._12_4_ = 0x3f800000;
    auVar351 = vdivps_avx512vl(auVar761,auVar287);
    auVar354 = ZEXT416(0) << 0x40;
    uVar1600 = vcmpps_avx512vl(auVar354,auVar350,2);
    uVar283 = vcmpps_avx512vl(auVar287,auVar354,1);
    auVar979._8_4_ = 0x80000000;
    auVar979._0_8_ = 0x8000000080000000;
    auVar979._12_4_ = 0x80000000;
    auVar1034._8_4_ = 0x40490fdb;
    auVar1034._0_8_ = 0x40490fdb40490fdb;
    auVar1034._12_4_ = 0x40490fdb;
    auVar1089._8_4_ = 0x7fffffff;
    auVar1089._0_8_ = 0x7fffffff7fffffff;
    auVar1089._12_4_ = 0x7fffffff;
    auVar1142._8_4_ = 0xbc83a25c;
    auVar1142._0_8_ = 0xbc83a25cbc83a25c;
    auVar1142._12_4_ = 0xbc83a25c;
    auVar1189._8_4_ = 0xbd99b01e;
    auVar1189._0_8_ = 0xbd99b01ebd99b01e;
    auVar1189._12_4_ = 0xbd99b01e;
    auVar1239._8_4_ = 0xbe117200;
    auVar1239._0_8_ = 0xbe117200be117200;
    auVar1239._12_4_ = 0xbe117200;
    auVar1287._8_4_ = 0xbeaaaa53;
    auVar1287._0_8_ = 0xbeaaaa53beaaaa53;
    auVar1287._12_4_ = 0xbeaaaa53;
    auVar1341._8_4_ = 0x3b3ac537;
    auVar1341._0_8_ = 0x3b3ac5373b3ac537;
    auVar1341._12_4_ = 0x3b3ac537;
    auVar1395._8_4_ = 0x3d2edd4e;
    auVar1395._0_8_ = 0x3d2edd4e3d2edd4e;
    auVar1395._12_4_ = 0x3d2edd4e;
    auVar1449._8_4_ = 0x3dd9ed24;
    auVar1449._0_8_ = 0x3dd9ed243dd9ed24;
    auVar1449._12_4_ = 0x3dd9ed24;
    auVar1502._8_4_ = 0x3e4cb974;
    auVar1502._0_8_ = 0x3e4cb9743e4cb974;
    auVar1502._12_4_ = 0x3e4cb974;
    auVar1555._8_4_ = 0x3fc90fdb;
    auVar1555._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar1555._12_4_ = 0x3fc90fdb;
    auVar350 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      auVar355 = *(undefined1 (*) [16])(ptr + uVar279);
      uVar282 = vcmpps_avx512vl(auVar355,auVar354,4);
      uVar284 = vcmpps_avx512vl(auVar355,auVar354,1);
      auVar49._8_4_ = 0xc0490fdb;
      auVar49._0_8_ = 0xc0490fdbc0490fdb;
      auVar49._12_4_ = 0xc0490fdb;
      auVar356 = vblendmps_avx512vl(auVar1034,auVar49);
      bVar281 = (bool)((byte)uVar284 & 1);
      auVar368._0_4_ = (uint)bVar281 * auVar356._0_4_ | (uint)!bVar281 * in_ZMM18._0_4_;
      bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
      auVar368._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * in_ZMM18._4_4_;
      bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
      auVar368._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * in_ZMM18._8_4_;
      bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
      auVar368._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * in_ZMM18._12_4_;
      uVar284 = vcmpps_avx512vl(auVar287,auVar354,4);
      uVar284 = uVar282 & uVar284;
      auVar356 = vandps_avx512vl(auVar355,auVar979);
      auVar355 = vmulps_avx512vl(auVar355,auVar351);
      auVar359 = vandps_avx512vl(auVar355,auVar1089);
      uVar285 = vcmpps_avx512vl(auVar761,auVar359,1);
      auVar50._8_4_ = 0xbf800000;
      auVar50._0_8_ = 0xbf800000bf800000;
      auVar50._12_4_ = 0xbf800000;
      auVar360 = vblendmps_avx512vl(auVar359,auVar50);
      bVar11 = (byte)uVar285;
      auVar369._0_4_ =
           (uint)(bVar11 & 1) * auVar360._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
      bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
      auVar369._4_4_ = (uint)bVar281 * auVar360._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
      bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
      auVar369._8_4_ = (uint)bVar281 * auVar360._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
      bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
      auVar369._12_4_ = (uint)bVar281 * auVar360._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
      auVar359 = vdivps_avx512vl(auVar369,auVar359);
      auVar370._0_4_ = (uint)(bVar11 & 1) * auVar359._0_4_ | !(bool)(bVar11 & 1) * auVar369._0_4_;
      bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
      auVar370._4_4_ = (uint)bVar281 * auVar359._4_4_ | !bVar281 * auVar369._4_4_;
      bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
      auVar370._8_4_ = (uint)bVar281 * auVar359._8_4_ | !bVar281 * auVar369._8_4_;
      bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
      auVar370._12_4_ = (uint)bVar281 * auVar359._12_4_ | !bVar281 * auVar369._12_4_;
      in_ZMM21 = ZEXT1664(auVar370);
      auVar359 = vmulps_avx512vl(auVar370,auVar370);
      auVar360 = vmulps_avx512vl(auVar359,auVar359);
      auVar395 = vfmadd213ps_avx512vl(auVar1142,auVar360,auVar1189);
      auVar395 = vfmadd213ps_avx512vl(auVar395,auVar360,auVar1239);
      auVar395 = vfmadd213ps_avx512vl(auVar395,auVar360,auVar1287);
      auVar396 = vfmadd213ps_avx512vl(auVar1341,auVar360,auVar1395);
      auVar396 = vfmadd213ps_avx512vl(auVar396,auVar360,auVar1449);
      auVar396 = vfmadd213ps_avx512vl(auVar396,auVar360,auVar1502);
      auVar360 = vfmadd213ps_avx512vl(auVar396,auVar360,auVar761);
      auVar359 = vfmadd231ps_avx512vl(auVar360,auVar359,auVar395);
      auVar359 = vmulps_avx512vl(auVar359,auVar370);
      auVar360 = vaddps_avx512vl(auVar359,auVar1555);
      auVar371._0_4_ =
           (uint)(bVar11 & 1) * auVar360._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar359._0_4_;
      bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
      auVar371._4_4_ = (uint)bVar281 * auVar360._4_4_ | (uint)!bVar281 * auVar359._4_4_;
      bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
      auVar371._8_4_ = (uint)bVar281 * auVar360._8_4_ | (uint)!bVar281 * auVar359._8_4_;
      bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
      auVar371._12_4_ = (uint)bVar281 * auVar360._12_4_ | (uint)!bVar281 * auVar359._12_4_;
      auVar355 = vpternlogd_avx512vl(auVar371,auVar355,auVar979,0xf8);
      auVar359 = vaddps_avx512vl(auVar355,auVar368);
      bVar281 = (bool)((byte)uVar283 & 1);
      bVar14 = (bool)((byte)(uVar283 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar283 >> 2) & 1);
      bVar18 = (bool)((byte)(uVar283 >> 3) & 1);
      auVar356 = vorps_avx512vl(auVar356,auVar350);
      auVar372._4_4_ = (uint)((byte)(uVar282 >> 1) & 1) * auVar356._4_4_;
      auVar372._0_4_ = (uint)((byte)uVar282 & 1) * auVar356._0_4_;
      auVar372._8_4_ = (uint)((byte)(uVar282 >> 2) & 1) * auVar356._8_4_;
      auVar372._12_4_ = (uint)((byte)(uVar282 >> 3) & 1) * auVar356._12_4_;
      uVar34 = (ushort)uVar282 | (ushort)uVar1600;
      auVar356 = vorps_avx512vl(auVar372,auVar683);
      auVar360 = vmovdqa32_avx512vl(auVar372);
      bVar12 = (bool)((byte)uVar34 & 1);
      bVar15 = (bool)((byte)(uVar34 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar34 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar34 >> 3) & 1);
      bVar13 = (bool)((byte)uVar284 & 1);
      auVar373._0_4_ =
           (uint)bVar13 * ((uint)bVar281 * auVar359._0_4_ | (uint)!bVar281 * auVar355._0_4_) |
           (uint)!bVar13 * ((uint)bVar12 * auVar360._0_4_ | (uint)!bVar12 * auVar356._0_4_);
      bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
      auVar373._4_4_ =
           (uint)bVar281 * ((uint)bVar14 * auVar359._4_4_ | (uint)!bVar14 * auVar355._4_4_) |
           (uint)!bVar281 * ((uint)bVar15 * auVar360._4_4_ | (uint)!bVar15 * auVar356._4_4_);
      bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
      auVar373._8_4_ =
           (uint)bVar281 * ((uint)bVar16 * auVar359._8_4_ | (uint)!bVar16 * auVar355._8_4_) |
           (uint)!bVar281 * ((uint)bVar17 * auVar360._8_4_ | (uint)!bVar17 * auVar356._8_4_);
      bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
      auVar373._12_4_ =
           (uint)bVar281 * ((uint)bVar18 * auVar359._12_4_ | (uint)!bVar18 * auVar355._12_4_) |
           (uint)!bVar281 * ((uint)bVar19 * auVar360._12_4_ | (uint)!bVar19 * auVar356._12_4_);
      in_ZMM18 = ZEXT1664(auVar373);
      *(undefined1 (*) [16])(outptr + uVar279) = auVar373;
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      pfVar1599 = outptr;
      fVar667 = atan2f(*(float *)((long)ptr + uVar279 * 4 + lVar280),fVar666);
      *(float *)((long)outptr + uVar279 * 4 + lVar280) = fVar667;
      lVar280 = lVar280 + 4;
      outptr = pfVar1599;
    }
    return;
  case 0xb:
    iVar278 = bw;
    if (bw < aw) {
      iVar278 = aw;
    }
    iVar276 = bp;
    if (bp < ap) {
      iVar276 = ap;
    }
    iVar277 = iVar276 * iVar278;
    if (ap != bp) {
LAB_00380733:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        pfVar1599 = ptr1;
        if (iVar276 == 0x10) {
          iVar277 = 0;
          if (0 < iVar278) {
            iVar277 = iVar278;
          }
          while( true ) {
            bVar281 = iVar277 == 0;
            iVar277 = iVar277 + -1;
            if (bVar281) break;
            auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            y_01[1] = (float)in_stack_fffffffffffffe7c._0_4_;
            y_01[2] = (float)in_stack_fffffffffffffe7c._4_4_;
            y_01[3] = (float)in_stack_fffffffffffffe7c._8_4_;
            y_01[0] = (float)in_stack_fffffffffffffe78;
            y_01._16_8_ = outptr;
            y_01[6] = (float)(int)in_stack_fffffffffffffe90;
            y_01[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
            y_01[8] = (float)in_stack_fffffffffffffe98._0_4_;
            y_01[9] = (float)in_stack_fffffffffffffe98._4_4_;
            y_01[10] = (float)in_stack_fffffffffffffe98._8_4_;
            y_01[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
            y_01[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
            y_01[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
            y_01[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
            y_01[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
            x_01[4] = (float)(int)pfVar1599;
            x_01[0] = (float)in_stack_fffffffffffffeb8._0_4_;
            x_01[1] = (float)in_stack_fffffffffffffeb8._4_4_;
            x_01[2] = (float)in_stack_fffffffffffffeb8._8_4_;
            x_01[3] = (float)in_stack_fffffffffffffeb8._12_4_;
            x_01[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
            x_01[6] = (float)(int)in_stack_fffffffffffffed0;
            x_01[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
            x_01[8] = (float)(int)in_stack_fffffffffffffed8;
            x_01[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
            x_01[10] = (float)(int)in_stack_fffffffffffffee0;
            x_01[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
            x_01[0xc] = (float)(int)in_stack_fffffffffffffee8;
            x_01[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
            x_01[0xe] = (float)(int)in_stack_fffffffffffffef0;
            x_01[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
            atan2512_ps(__return_storage_ptr__,y_01,x_01);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
          }
        }
        pauVar1598 = (undefined1 (*) [64])outptr;
        if (iVar276 == 8) {
          iVar277 = 0;
          while( true ) {
            if (iVar278 <= iVar277 + 1) break;
            fVar666 = *ptr1;
            fVar667 = ptr1[1];
            auVar852._4_4_ = fVar667;
            auVar852._0_4_ = fVar667;
            auVar852._8_4_ = fVar667;
            auVar852._12_4_ = fVar667;
            auVar852._16_4_ = fVar667;
            auVar852._20_4_ = fVar667;
            auVar852._24_4_ = fVar667;
            auVar852._28_4_ = fVar667;
            auVar1594 = vinsertf64x4_avx512f
                                  (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar852,
                                   1);
            y_05[1] = (float)in_stack_fffffffffffffe7c._0_4_;
            y_05[2] = (float)in_stack_fffffffffffffe7c._4_4_;
            y_05[3] = (float)in_stack_fffffffffffffe7c._8_4_;
            y_05[0] = (float)in_stack_fffffffffffffe78;
            y_05._16_8_ = pauVar1598;
            y_05[6] = (float)(int)in_stack_fffffffffffffe90;
            y_05[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
            y_05[8] = (float)in_stack_fffffffffffffe98._0_4_;
            y_05[9] = (float)in_stack_fffffffffffffe98._4_4_;
            y_05[10] = (float)in_stack_fffffffffffffe98._8_4_;
            y_05[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
            y_05[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
            y_05[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
            y_05[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
            y_05[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
            x_05[4] = (float)(int)pfVar1599;
            x_05[0] = (float)in_stack_fffffffffffffeb8._0_4_;
            x_05[1] = (float)in_stack_fffffffffffffeb8._4_4_;
            x_05[2] = (float)in_stack_fffffffffffffeb8._8_4_;
            x_05[3] = (float)in_stack_fffffffffffffeb8._12_4_;
            x_05[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
            x_05[6] = (float)(int)in_stack_fffffffffffffed0;
            x_05[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
            x_05[8] = (float)(int)in_stack_fffffffffffffed8;
            x_05[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
            x_05[10] = (float)(int)in_stack_fffffffffffffee0;
            x_05[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
            x_05[0xc] = (float)(int)in_stack_fffffffffffffee8;
            x_05[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
            x_05[0xe] = (float)(int)in_stack_fffffffffffffef0;
            x_05[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
            atan2512_ps(__return_storage_ptr__,y_05,x_05);
            *(undefined1 (*) [64])outptr = auVar1594;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar277 = iVar277 + 2;
          }
          auVar287 = ZEXT816(0) << 0x40;
          auVar783._8_4_ = 0x80000000;
          auVar783._0_8_ = 0x8000000080000000;
          auVar783._12_4_ = 0x80000000;
          auVar783._16_4_ = 0x80000000;
          auVar783._20_4_ = 0x80000000;
          auVar783._24_4_ = 0x80000000;
          auVar783._28_4_ = 0x80000000;
          auVar853._8_4_ = 0x40490fdb;
          auVar853._0_8_ = 0x40490fdb40490fdb;
          auVar853._12_4_ = 0x40490fdb;
          auVar853._16_4_ = 0x40490fdb;
          auVar853._20_4_ = 0x40490fdb;
          auVar853._24_4_ = 0x40490fdb;
          auVar853._28_4_ = 0x40490fdb;
          auVar934._8_4_ = 0x7fffffff;
          auVar934._0_8_ = 0x7fffffff7fffffff;
          auVar934._12_4_ = 0x7fffffff;
          auVar934._16_4_ = 0x7fffffff;
          auVar934._20_4_ = 0x7fffffff;
          auVar934._24_4_ = 0x7fffffff;
          auVar934._28_4_ = 0x7fffffff;
          auVar993._8_4_ = 0x3f800000;
          auVar993._0_8_ = 0x3f8000003f800000;
          auVar993._12_4_ = 0x3f800000;
          auVar993._16_4_ = 0x3f800000;
          auVar993._20_4_ = 0x3f800000;
          auVar993._24_4_ = 0x3f800000;
          auVar993._28_4_ = 0x3f800000;
          auVar1048._8_4_ = 0xbc83a25c;
          auVar1048._0_8_ = 0xbc83a25cbc83a25c;
          auVar1048._12_4_ = 0xbc83a25c;
          auVar1048._16_4_ = 0xbc83a25c;
          auVar1048._20_4_ = 0xbc83a25c;
          auVar1048._24_4_ = 0xbc83a25c;
          auVar1048._28_4_ = 0xbc83a25c;
          auVar1102._8_4_ = 0xbd99b01e;
          auVar1102._0_8_ = 0xbd99b01ebd99b01e;
          auVar1102._12_4_ = 0xbd99b01e;
          auVar1102._16_4_ = 0xbd99b01e;
          auVar1102._20_4_ = 0xbd99b01e;
          auVar1102._24_4_ = 0xbd99b01e;
          auVar1102._28_4_ = 0xbd99b01e;
          auVar1153._8_4_ = 0xbe117200;
          auVar1153._0_8_ = 0xbe117200be117200;
          auVar1153._12_4_ = 0xbe117200;
          auVar1153._16_4_ = 0xbe117200;
          auVar1153._20_4_ = 0xbe117200;
          auVar1153._24_4_ = 0xbe117200;
          auVar1153._28_4_ = 0xbe117200;
          auVar1202._8_4_ = 0xbeaaaa53;
          auVar1202._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1202._12_4_ = 0xbeaaaa53;
          auVar1202._16_4_ = 0xbeaaaa53;
          auVar1202._20_4_ = 0xbeaaaa53;
          auVar1202._24_4_ = 0xbeaaaa53;
          auVar1202._28_4_ = 0xbeaaaa53;
          auVar1252._8_4_ = 0x3b3ac537;
          auVar1252._0_8_ = 0x3b3ac5373b3ac537;
          auVar1252._12_4_ = 0x3b3ac537;
          auVar1252._16_4_ = 0x3b3ac537;
          auVar1252._20_4_ = 0x3b3ac537;
          auVar1252._24_4_ = 0x3b3ac537;
          auVar1252._28_4_ = 0x3b3ac537;
          auVar1300._8_4_ = 0x3d2edd4e;
          auVar1300._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1300._12_4_ = 0x3d2edd4e;
          auVar1300._16_4_ = 0x3d2edd4e;
          auVar1300._20_4_ = 0x3d2edd4e;
          auVar1300._24_4_ = 0x3d2edd4e;
          auVar1300._28_4_ = 0x3d2edd4e;
          auVar1354._8_4_ = 0x3dd9ed24;
          auVar1354._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1354._12_4_ = 0x3dd9ed24;
          auVar1354._16_4_ = 0x3dd9ed24;
          auVar1354._20_4_ = 0x3dd9ed24;
          auVar1354._24_4_ = 0x3dd9ed24;
          auVar1354._28_4_ = 0x3dd9ed24;
          auVar1408._8_4_ = 0x3e4cb974;
          auVar1408._0_8_ = 0x3e4cb9743e4cb974;
          auVar1408._12_4_ = 0x3e4cb974;
          auVar1408._16_4_ = 0x3e4cb974;
          auVar1408._20_4_ = 0x3e4cb974;
          auVar1408._24_4_ = 0x3e4cb974;
          auVar1408._28_4_ = 0x3e4cb974;
          auVar1462._8_4_ = 0x3fc90fdb;
          auVar1462._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1462._12_4_ = 0x3fc90fdb;
          auVar1462._16_4_ = 0x3fc90fdb;
          auVar1462._20_4_ = 0x3fc90fdb;
          auVar1462._24_4_ = 0x3fc90fdb;
          auVar1462._28_4_ = 0x3fc90fdb;
          auVar1515._8_4_ = 0x40490fdb;
          auVar1515._0_8_ = 0x40490fdb40490fdb;
          auVar1515._12_4_ = 0x40490fdb;
          auVar1515._16_4_ = 0x40490fdb;
          auVar1515._20_4_ = 0x40490fdb;
          auVar1515._24_4_ = 0x40490fdb;
          auVar1515._28_4_ = 0x40490fdb;
          auVar1568._8_4_ = 0x3fc90fdb;
          auVar1568._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1568._12_4_ = 0x3fc90fdb;
          auVar1568._16_4_ = 0x3fc90fdb;
          auVar1568._20_4_ = 0x3fc90fdb;
          auVar1568._24_4_ = 0x3fc90fdb;
          auVar1568._28_4_ = 0x3fc90fdb;
          for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
            auVar495 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar411 = *(undefined1 (*) [32])ptr;
            uVar279 = vcmpps_avx512vl(auVar495,ZEXT1632(auVar287),4);
            uVar283 = vcmpps_avx512vl(auVar411,ZEXT1632(auVar287),4);
            uVar283 = uVar279 & uVar283;
            vandps_avx512vl(auVar495,auVar783);
            in_ZMM18 = ZEXT3264(auVar411);
            auVar502 = ZEXT1632(auVar287);
            uVar282 = vcmpps_avx512vl(auVar495,auVar502,1);
            auVar99._8_4_ = 0xc0490fdb;
            auVar99._0_8_ = 0xc0490fdbc0490fdb;
            auVar99._12_4_ = 0xc0490fdb;
            auVar99._16_4_ = 0xc0490fdb;
            auVar99._20_4_ = 0xc0490fdb;
            auVar99._24_4_ = 0xc0490fdb;
            auVar99._28_4_ = 0xc0490fdb;
            auVar444 = vblendmps_avx512vl(auVar853,auVar99);
            bVar281 = (bool)((byte)uVar282 & 1);
            auVar445._0_4_ = (uint)bVar281 * auVar444._0_4_ | (uint)!bVar281 * in_ZMM19._0_4_;
            bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
            auVar445._4_4_ = (uint)bVar281 * auVar444._4_4_ | (uint)!bVar281 * in_ZMM19._4_4_;
            bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
            auVar445._8_4_ = (uint)bVar281 * auVar444._8_4_ | (uint)!bVar281 * in_ZMM19._8_4_;
            bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
            auVar445._12_4_ = (uint)bVar281 * auVar444._12_4_ | (uint)!bVar281 * in_ZMM19._12_4_;
            bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
            auVar445._16_4_ = (uint)bVar281 * auVar444._16_4_ | (uint)!bVar281 * in_ZMM19._16_4_;
            bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
            auVar445._20_4_ = (uint)bVar281 * auVar444._20_4_ | (uint)!bVar281 * in_ZMM19._20_4_;
            bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
            auVar445._24_4_ = (uint)bVar281 * auVar444._24_4_ | (uint)!bVar281 * in_ZMM19._24_4_;
            bVar281 = SUB81(uVar282 >> 7,0);
            auVar445._28_4_ = (uint)bVar281 * auVar444._28_4_ | (uint)!bVar281 * in_ZMM19._28_4_;
            in_ZMM19 = ZEXT3264(auVar445);
            auVar495 = vdivps_avx512vl(auVar495,auVar411);
            vandps_avx512vl(auVar495,auVar934);
            uVar282 = vcmpps_avx512vl(auVar993,auVar495,1);
            auVar100._8_4_ = 0xbf800000;
            auVar100._0_8_ = 0xbf800000bf800000;
            auVar100._12_4_ = 0xbf800000;
            auVar100._16_4_ = 0xbf800000;
            auVar100._20_4_ = 0xbf800000;
            auVar100._24_4_ = 0xbf800000;
            auVar100._28_4_ = 0xbf800000;
            auVar444 = vblendmps_avx512vl(auVar495,auVar100);
            bVar11 = (byte)uVar282;
            auVar446._0_4_ =
                 (uint)(bVar11 & 1) * auVar444._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
            bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
            auVar446._4_4_ = (uint)bVar281 * auVar444._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
            bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
            auVar446._8_4_ = (uint)bVar281 * auVar444._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
            bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
            auVar446._12_4_ = (uint)bVar281 * auVar444._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
            bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
            auVar446._16_4_ = (uint)bVar281 * auVar444._16_4_ | (uint)!bVar281 * in_ZMM21._16_4_;
            bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
            auVar446._20_4_ = (uint)bVar281 * auVar444._20_4_ | (uint)!bVar281 * in_ZMM21._20_4_;
            bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
            auVar446._24_4_ = (uint)bVar281 * auVar444._24_4_ | (uint)!bVar281 * in_ZMM21._24_4_;
            bVar281 = SUB81(uVar282 >> 7,0);
            auVar446._28_4_ = (uint)bVar281 * auVar444._28_4_ | (uint)!bVar281 * in_ZMM21._28_4_;
            uVar284 = vcmpps_avx512vl(auVar411,auVar502,1);
            auVar444 = vdivps_avx512vl(auVar446,auVar495);
            auVar447._0_4_ =
                 (uint)(bVar11 & 1) * auVar444._0_4_ | !(bool)(bVar11 & 1) * auVar446._0_4_;
            bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
            auVar447._4_4_ = (uint)bVar281 * auVar444._4_4_ | !bVar281 * auVar446._4_4_;
            bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
            auVar447._8_4_ = (uint)bVar281 * auVar444._8_4_ | !bVar281 * auVar446._8_4_;
            bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
            auVar447._12_4_ = (uint)bVar281 * auVar444._12_4_ | !bVar281 * auVar446._12_4_;
            bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
            auVar447._16_4_ = (uint)bVar281 * auVar444._16_4_ | !bVar281 * auVar446._16_4_;
            bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
            auVar447._20_4_ = (uint)bVar281 * auVar444._20_4_ | !bVar281 * auVar446._20_4_;
            bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
            auVar447._24_4_ = (uint)bVar281 * auVar444._24_4_ | !bVar281 * auVar446._24_4_;
            bVar281 = SUB81(uVar282 >> 7,0);
            auVar447._28_4_ = (uint)bVar281 * auVar444._28_4_ | !bVar281 * auVar446._28_4_;
            in_ZMM21 = ZEXT3264(auVar447);
            auVar444 = vmulps_avx512vl(auVar447,auVar447);
            auVar558 = vmulps_avx512vl(auVar444,auVar444);
            auVar498 = vfmadd213ps_avx512vl(auVar1048,auVar558,auVar1102);
            auVar498 = vfmadd213ps_avx512vl(auVar498,auVar558,auVar1153);
            auVar498 = vfmadd213ps_avx512vl(auVar498,auVar558,auVar1202);
            auVar499 = vfmadd213ps_avx512vl(auVar1252,auVar558,auVar1300);
            auVar499 = vfmadd213ps_avx512vl(auVar499,auVar558,auVar1354);
            auVar499 = vfmadd213ps_avx512vl(auVar499,auVar558,auVar1408);
            auVar558 = vfmadd213ps_avx512vl(auVar499,auVar558,auVar993);
            auVar444 = vfmadd231ps_avx512vl(auVar558,auVar444,auVar498);
            auVar444 = vmulps_avx512vl(auVar444,auVar447);
            auVar558 = vaddps_avx512vl(auVar444,auVar1462);
            auVar448._0_4_ =
                 (uint)(bVar11 & 1) * auVar558._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar444._0_4_;
            bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
            auVar448._4_4_ = (uint)bVar281 * auVar558._4_4_ | (uint)!bVar281 * auVar444._4_4_;
            bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
            auVar448._8_4_ = (uint)bVar281 * auVar558._8_4_ | (uint)!bVar281 * auVar444._8_4_;
            bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
            auVar448._12_4_ = (uint)bVar281 * auVar558._12_4_ | (uint)!bVar281 * auVar444._12_4_;
            bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
            auVar448._16_4_ = (uint)bVar281 * auVar558._16_4_ | (uint)!bVar281 * auVar444._16_4_;
            bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
            auVar448._20_4_ = (uint)bVar281 * auVar558._20_4_ | (uint)!bVar281 * auVar444._20_4_;
            bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
            auVar448._24_4_ = (uint)bVar281 * auVar558._24_4_ | (uint)!bVar281 * auVar444._24_4_;
            bVar281 = SUB81(uVar282 >> 7,0);
            auVar448._28_4_ = (uint)bVar281 * auVar558._28_4_ | (uint)!bVar281 * auVar444._28_4_;
            auVar495 = vpternlogd_avx512vl(auVar448,auVar495,auVar783,0xf8);
            auVar444 = vaddps_avx512vl(auVar495,auVar445);
            bVar281 = (bool)((byte)uVar284 & 1);
            bVar13 = (bool)((byte)(uVar284 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar284 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar284 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar284 >> 4) & 1);
            bVar21 = (bool)((byte)(uVar284 >> 5) & 1);
            bVar23 = (bool)((byte)(uVar284 >> 6) & 1);
            bVar25 = SUB81(uVar284 >> 7,0);
            auVar558 = vpternlogd_avx512vl(auVar411,auVar1515,auVar783,0xec);
            uVar1600 = vcmpps_avx512vl(auVar502,auVar558,2);
            auVar411 = vorps_avx512vl(auVar411,auVar1568);
            auVar449._4_4_ = (uint)((byte)(uVar279 >> 1) & 1) * auVar411._4_4_;
            auVar449._0_4_ = (uint)((byte)uVar279 & 1) * auVar411._0_4_;
            auVar449._8_4_ = (uint)((byte)(uVar279 >> 2) & 1) * auVar411._8_4_;
            auVar449._12_4_ = (uint)((byte)(uVar279 >> 3) & 1) * auVar411._12_4_;
            auVar449._16_4_ = (uint)((byte)(uVar279 >> 4) & 1) * auVar411._16_4_;
            auVar449._20_4_ = (uint)((byte)(uVar279 >> 5) & 1) * auVar411._20_4_;
            auVar449._24_4_ = (uint)((byte)(uVar279 >> 6) & 1) * auVar411._24_4_;
            auVar449._28_4_ = (uint)(byte)(uVar279 >> 7) * auVar411._28_4_;
            bVar11 = (byte)uVar279 | (byte)uVar1600;
            auVar411 = vorps_avx512vl(auVar449,auVar1515);
            auVar558 = vmovdqa32_avx512vl(auVar449);
            bVar14 = (bool)(bVar11 >> 1 & 1);
            bVar16 = (bool)(bVar11 >> 2 & 1);
            bVar18 = (bool)(bVar11 >> 3 & 1);
            bVar20 = (bool)(bVar11 >> 4 & 1);
            bVar22 = (bool)(bVar11 >> 5 & 1);
            bVar24 = (bool)(bVar11 >> 6 & 1);
            bVar12 = (bool)((byte)uVar283 & 1);
            auVar450._0_4_ =
                 (uint)bVar12 * ((uint)bVar281 * auVar444._0_4_ | (uint)!bVar281 * auVar495._0_4_) |
                 (uint)!bVar12 *
                 ((uint)(bVar11 & 1) * auVar558._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar411._0_4_);
            bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
            auVar450._4_4_ =
                 (uint)bVar281 * ((uint)bVar13 * auVar444._4_4_ | (uint)!bVar13 * auVar495._4_4_) |
                 (uint)!bVar281 * ((uint)bVar14 * auVar558._4_4_ | (uint)!bVar14 * auVar411._4_4_);
            bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
            auVar450._8_4_ =
                 (uint)bVar281 * ((uint)bVar15 * auVar444._8_4_ | (uint)!bVar15 * auVar495._8_4_) |
                 (uint)!bVar281 * ((uint)bVar16 * auVar558._8_4_ | (uint)!bVar16 * auVar411._8_4_);
            bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
            auVar450._12_4_ =
                 (uint)bVar281 * ((uint)bVar17 * auVar444._12_4_ | (uint)!bVar17 * auVar495._12_4_)
                 | (uint)!bVar281 *
                   ((uint)bVar18 * auVar558._12_4_ | (uint)!bVar18 * auVar411._12_4_);
            bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
            auVar450._16_4_ =
                 (uint)bVar281 * ((uint)bVar19 * auVar444._16_4_ | (uint)!bVar19 * auVar495._16_4_)
                 | (uint)!bVar281 *
                   ((uint)bVar20 * auVar558._16_4_ | (uint)!bVar20 * auVar411._16_4_);
            bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
            auVar450._20_4_ =
                 (uint)bVar281 * ((uint)bVar21 * auVar444._20_4_ | (uint)!bVar21 * auVar495._20_4_)
                 | (uint)!bVar281 *
                   ((uint)bVar22 * auVar558._20_4_ | (uint)!bVar22 * auVar411._20_4_);
            bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
            auVar450._24_4_ =
                 (uint)bVar281 * ((uint)bVar23 * auVar444._24_4_ | (uint)!bVar23 * auVar495._24_4_)
                 | (uint)!bVar281 *
                   ((uint)bVar24 * auVar558._24_4_ | (uint)!bVar24 * auVar411._24_4_);
            bVar281 = SUB81(uVar283 >> 7,0);
            auVar450._28_4_ =
                 (uint)bVar281 * ((uint)bVar25 * auVar444._28_4_ | (uint)!bVar25 * auVar495._28_4_)
                 | (uint)!bVar281 *
                   ((uint)(bVar11 >> 7) * auVar558._28_4_ |
                   (uint)!(bool)(bVar11 >> 7) * auVar411._28_4_);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar450;
            ptr = (float *)((long)ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          }
        }
        if (iVar276 != 4) {
          return;
        }
        uVar279 = 0;
        while( true ) {
          if (iVar278 <= (int)uVar279 + 3) break;
          fVar666 = ptr1[uVar279 + 3];
          auVar703._20_4_ = fVar666;
          auVar703._16_4_ = fVar666;
          auVar703._24_4_ = fVar666;
          auVar703._28_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 2];
          auVar703._4_4_ = fVar666;
          auVar703._0_4_ = fVar666;
          auVar703._8_4_ = fVar666;
          auVar703._12_4_ = fVar666;
          fVar666 = ptr1[uVar279 + 1];
          fVar667 = ptr1[uVar279];
          auVar1594 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar703,1);
          y_07[1] = (float)in_stack_fffffffffffffe7c._0_4_;
          y_07[2] = (float)in_stack_fffffffffffffe7c._4_4_;
          y_07[3] = (float)in_stack_fffffffffffffe7c._8_4_;
          y_07[0] = (float)in_stack_fffffffffffffe78;
          y_07._16_8_ = pauVar1598;
          y_07[6] = (float)(int)in_stack_fffffffffffffe90;
          y_07[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
          y_07[8] = (float)in_stack_fffffffffffffe98._0_4_;
          y_07[9] = (float)in_stack_fffffffffffffe98._4_4_;
          y_07[10] = (float)in_stack_fffffffffffffe98._8_4_;
          y_07[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
          y_07[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
          y_07[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
          y_07[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
          y_07[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
          x_07[4] = (float)(int)pfVar1599;
          x_07[0] = (float)in_stack_fffffffffffffeb8._0_4_;
          x_07[1] = (float)in_stack_fffffffffffffeb8._4_4_;
          x_07[2] = (float)in_stack_fffffffffffffeb8._8_4_;
          x_07[3] = (float)in_stack_fffffffffffffeb8._12_4_;
          x_07[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
          x_07[6] = (float)(int)in_stack_fffffffffffffed0;
          x_07[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
          x_07[8] = (float)(int)in_stack_fffffffffffffed8;
          x_07[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
          x_07[10] = (float)(int)in_stack_fffffffffffffee0;
          x_07[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
          x_07[0xc] = (float)(int)in_stack_fffffffffffffee8;
          x_07[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          x_07[0xe] = (float)(int)in_stack_fffffffffffffef0;
          x_07[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
          atan2512_ps(__return_storage_ptr__,y_07,x_07);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          uVar279 = uVar279 + 4;
        }
        auVar287 = ZEXT816(0) << 0x40;
        auVar784._8_4_ = 0x80000000;
        auVar784._0_8_ = 0x8000000080000000;
        auVar784._12_4_ = 0x80000000;
        auVar784._16_4_ = 0x80000000;
        auVar784._20_4_ = 0x80000000;
        auVar784._24_4_ = 0x80000000;
        auVar784._28_4_ = 0x80000000;
        auVar854._8_4_ = 0x40490fdb;
        auVar854._0_8_ = 0x40490fdb40490fdb;
        auVar854._12_4_ = 0x40490fdb;
        auVar854._16_4_ = 0x40490fdb;
        auVar854._20_4_ = 0x40490fdb;
        auVar854._24_4_ = 0x40490fdb;
        auVar854._28_4_ = 0x40490fdb;
        auVar935._8_4_ = 0x7fffffff;
        auVar935._0_8_ = 0x7fffffff7fffffff;
        auVar935._12_4_ = 0x7fffffff;
        auVar935._16_4_ = 0x7fffffff;
        auVar935._20_4_ = 0x7fffffff;
        auVar935._24_4_ = 0x7fffffff;
        auVar935._28_4_ = 0x7fffffff;
        auVar994._8_4_ = 0x3f800000;
        auVar994._0_8_ = 0x3f8000003f800000;
        auVar994._12_4_ = 0x3f800000;
        auVar994._16_4_ = 0x3f800000;
        auVar994._20_4_ = 0x3f800000;
        auVar994._24_4_ = 0x3f800000;
        auVar994._28_4_ = 0x3f800000;
        auVar1049._8_4_ = 0xbc83a25c;
        auVar1049._0_8_ = 0xbc83a25cbc83a25c;
        auVar1049._12_4_ = 0xbc83a25c;
        auVar1049._16_4_ = 0xbc83a25c;
        auVar1049._20_4_ = 0xbc83a25c;
        auVar1049._24_4_ = 0xbc83a25c;
        auVar1049._28_4_ = 0xbc83a25c;
        auVar1103._8_4_ = 0xbd99b01e;
        auVar1103._0_8_ = 0xbd99b01ebd99b01e;
        auVar1103._12_4_ = 0xbd99b01e;
        auVar1103._16_4_ = 0xbd99b01e;
        auVar1103._20_4_ = 0xbd99b01e;
        auVar1103._24_4_ = 0xbd99b01e;
        auVar1103._28_4_ = 0xbd99b01e;
        auVar1154._8_4_ = 0xbe117200;
        auVar1154._0_8_ = 0xbe117200be117200;
        auVar1154._12_4_ = 0xbe117200;
        auVar1154._16_4_ = 0xbe117200;
        auVar1154._20_4_ = 0xbe117200;
        auVar1154._24_4_ = 0xbe117200;
        auVar1154._28_4_ = 0xbe117200;
        auVar1203._8_4_ = 0xbeaaaa53;
        auVar1203._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1203._12_4_ = 0xbeaaaa53;
        auVar1203._16_4_ = 0xbeaaaa53;
        auVar1203._20_4_ = 0xbeaaaa53;
        auVar1203._24_4_ = 0xbeaaaa53;
        auVar1203._28_4_ = 0xbeaaaa53;
        auVar1253._8_4_ = 0x3b3ac537;
        auVar1253._0_8_ = 0x3b3ac5373b3ac537;
        auVar1253._12_4_ = 0x3b3ac537;
        auVar1253._16_4_ = 0x3b3ac537;
        auVar1253._20_4_ = 0x3b3ac537;
        auVar1253._24_4_ = 0x3b3ac537;
        auVar1253._28_4_ = 0x3b3ac537;
        auVar1301._8_4_ = 0x3d2edd4e;
        auVar1301._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1301._12_4_ = 0x3d2edd4e;
        auVar1301._16_4_ = 0x3d2edd4e;
        auVar1301._20_4_ = 0x3d2edd4e;
        auVar1301._24_4_ = 0x3d2edd4e;
        auVar1301._28_4_ = 0x3d2edd4e;
        auVar1355._8_4_ = 0x3dd9ed24;
        auVar1355._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1355._12_4_ = 0x3dd9ed24;
        auVar1355._16_4_ = 0x3dd9ed24;
        auVar1355._20_4_ = 0x3dd9ed24;
        auVar1355._24_4_ = 0x3dd9ed24;
        auVar1355._28_4_ = 0x3dd9ed24;
        auVar1409._8_4_ = 0x3e4cb974;
        auVar1409._0_8_ = 0x3e4cb9743e4cb974;
        auVar1409._12_4_ = 0x3e4cb974;
        auVar1409._16_4_ = 0x3e4cb974;
        auVar1409._20_4_ = 0x3e4cb974;
        auVar1409._24_4_ = 0x3e4cb974;
        auVar1409._28_4_ = 0x3e4cb974;
        auVar1463._8_4_ = 0x3fc90fdb;
        auVar1463._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1463._12_4_ = 0x3fc90fdb;
        auVar1463._16_4_ = 0x3fc90fdb;
        auVar1463._20_4_ = 0x3fc90fdb;
        auVar1463._24_4_ = 0x3fc90fdb;
        auVar1463._28_4_ = 0x3fc90fdb;
        auVar1516._8_4_ = 0x40490fdb;
        auVar1516._0_8_ = 0x40490fdb40490fdb;
        auVar1516._12_4_ = 0x40490fdb;
        auVar1516._16_4_ = 0x40490fdb;
        auVar1516._20_4_ = 0x40490fdb;
        auVar1516._24_4_ = 0x40490fdb;
        auVar1516._28_4_ = 0x40490fdb;
        auVar1569._8_4_ = 0x3fc90fdb;
        auVar1569._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1569._12_4_ = 0x3fc90fdb;
        auVar1569._16_4_ = 0x3fc90fdb;
        auVar1569._20_4_ = 0x3fc90fdb;
        auVar1569._24_4_ = 0x3fc90fdb;
        auVar1569._28_4_ = 0x3fc90fdb;
        for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
          auVar350 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279 + 1]));
          auVar351 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279]));
          auVar411 = *(undefined1 (*) [32])ptr;
          auVar495 = vinsertf32x4_avx512vl(ZEXT1632(auVar351),auVar350,1);
          uVar283 = vcmpps_avx512vl(auVar495,ZEXT1632(auVar287),4);
          uVar282 = vcmpps_avx512vl(auVar411,ZEXT1632(auVar287),4);
          uVar282 = uVar283 & uVar282;
          auVar502 = ZEXT1632(auVar287);
          uVar284 = vcmpps_avx512vl(auVar495,auVar502,1);
          auVar101._8_4_ = 0xc0490fdb;
          auVar101._0_8_ = 0xc0490fdbc0490fdb;
          auVar101._12_4_ = 0xc0490fdb;
          auVar101._16_4_ = 0xc0490fdb;
          auVar101._20_4_ = 0xc0490fdb;
          auVar101._24_4_ = 0xc0490fdb;
          auVar101._28_4_ = 0xc0490fdb;
          auVar444 = vblendmps_avx512vl(auVar854,auVar101);
          bVar281 = (bool)((byte)uVar284 & 1);
          auVar451._0_4_ = (uint)bVar281 * auVar444._0_4_ | (uint)!bVar281 * auVar351._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar451._4_4_ = (uint)bVar281 * auVar444._4_4_ | (uint)!bVar281 * auVar351._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar451._8_4_ = (uint)bVar281 * auVar444._8_4_ | (uint)!bVar281 * auVar351._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar451._12_4_ = (uint)bVar281 * auVar444._12_4_ | (uint)!bVar281 * auVar351._12_4_;
          auVar451._16_4_ = (uint)((byte)(uVar284 >> 4) & 1) * auVar444._16_4_;
          auVar451._20_4_ = (uint)((byte)(uVar284 >> 5) & 1) * auVar444._20_4_;
          auVar451._24_4_ = (uint)((byte)(uVar284 >> 6) & 1) * auVar444._24_4_;
          auVar451._28_4_ = (uint)(byte)(uVar284 >> 7) * auVar444._28_4_;
          auVar444 = vdivps_avx512vl(auVar495,auVar411);
          vandps_avx512vl(auVar444,auVar935);
          uVar284 = vcmpps_avx512vl(auVar994,auVar444,1);
          auVar102._8_4_ = 0xbf800000;
          auVar102._0_8_ = 0xbf800000bf800000;
          auVar102._12_4_ = 0xbf800000;
          auVar102._16_4_ = 0xbf800000;
          auVar102._20_4_ = 0xbf800000;
          auVar102._24_4_ = 0xbf800000;
          auVar102._28_4_ = 0xbf800000;
          auVar558 = vblendmps_avx512vl(auVar444,auVar102);
          bVar11 = (byte)uVar284;
          auVar452._0_4_ =
               (uint)(bVar11 & 1) * auVar558._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar452._4_4_ = (uint)bVar281 * auVar558._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar452._8_4_ = (uint)bVar281 * auVar558._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar452._12_4_ = (uint)bVar281 * auVar558._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar452._16_4_ = (uint)bVar281 * auVar558._16_4_ | (uint)!bVar281 * in_ZMM21._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar452._20_4_ = (uint)bVar281 * auVar558._20_4_ | (uint)!bVar281 * in_ZMM21._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar452._24_4_ = (uint)bVar281 * auVar558._24_4_ | (uint)!bVar281 * in_ZMM21._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar452._28_4_ = (uint)bVar281 * auVar558._28_4_ | (uint)!bVar281 * in_ZMM21._28_4_;
          vandps_avx512vl(auVar495,auVar784);
          auVar495 = vdivps_avx512vl(auVar452,auVar444);
          auVar453._0_4_ =
               (uint)(bVar11 & 1) * auVar495._0_4_ | !(bool)(bVar11 & 1) * auVar452._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar453._4_4_ = (uint)bVar281 * auVar495._4_4_ | !bVar281 * auVar452._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar453._8_4_ = (uint)bVar281 * auVar495._8_4_ | !bVar281 * auVar452._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar453._12_4_ = (uint)bVar281 * auVar495._12_4_ | !bVar281 * auVar452._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar453._16_4_ = (uint)bVar281 * auVar495._16_4_ | !bVar281 * auVar452._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar453._20_4_ = (uint)bVar281 * auVar495._20_4_ | !bVar281 * auVar452._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar453._24_4_ = (uint)bVar281 * auVar495._24_4_ | !bVar281 * auVar452._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar453._28_4_ = (uint)bVar281 * auVar495._28_4_ | !bVar281 * auVar452._28_4_;
          in_ZMM21 = ZEXT3264(auVar453);
          uVar285 = vcmpps_avx512vl(auVar411,auVar502,1);
          auVar495 = vmulps_avx512vl(auVar453,auVar453);
          auVar558 = vmulps_avx512vl(auVar495,auVar495);
          auVar498 = vfmadd213ps_avx512vl(auVar1049,auVar558,auVar1103);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar558,auVar1154);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar558,auVar1203);
          auVar499 = vfmadd213ps_avx512vl(auVar1253,auVar558,auVar1301);
          auVar499 = vfmadd213ps_avx512vl(auVar499,auVar558,auVar1355);
          auVar499 = vfmadd213ps_avx512vl(auVar499,auVar558,auVar1409);
          auVar558 = vfmadd213ps_avx512vl(auVar499,auVar558,auVar994);
          auVar495 = vfmadd231ps_avx512vl(auVar558,auVar495,auVar498);
          auVar495 = vmulps_avx512vl(auVar495,auVar453);
          auVar558 = vaddps_avx512vl(auVar495,auVar1463);
          auVar454._0_4_ =
               (uint)(bVar11 & 1) * auVar558._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar495._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar454._4_4_ = (uint)bVar281 * auVar558._4_4_ | (uint)!bVar281 * auVar495._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar454._8_4_ = (uint)bVar281 * auVar558._8_4_ | (uint)!bVar281 * auVar495._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar454._12_4_ = (uint)bVar281 * auVar558._12_4_ | (uint)!bVar281 * auVar495._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar454._16_4_ = (uint)bVar281 * auVar558._16_4_ | (uint)!bVar281 * auVar495._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar454._20_4_ = (uint)bVar281 * auVar558._20_4_ | (uint)!bVar281 * auVar495._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar454._24_4_ = (uint)bVar281 * auVar558._24_4_ | (uint)!bVar281 * auVar495._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar454._28_4_ = (uint)bVar281 * auVar558._28_4_ | (uint)!bVar281 * auVar495._28_4_;
          auVar495 = vpternlogd_avx512vl(auVar454,auVar444,auVar784,0xf8);
          auVar444 = vaddps_avx512vl(auVar495,auVar451);
          bVar281 = (bool)((byte)uVar285 & 1);
          bVar13 = (bool)((byte)(uVar285 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar285 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar285 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar285 >> 4) & 1);
          bVar21 = (bool)((byte)(uVar285 >> 5) & 1);
          bVar23 = (bool)((byte)(uVar285 >> 6) & 1);
          bVar25 = SUB81(uVar285 >> 7,0);
          auVar411 = vpternlogd_avx512vl(auVar411,auVar1516,auVar784,0xec);
          in_ZMM18 = ZEXT3264(auVar411);
          uVar1600 = vcmpps_avx512vl(auVar502,auVar411,2);
          auVar411 = vorps_avx512vl(auVar452,auVar1569);
          auVar455._4_4_ = (uint)((byte)(uVar283 >> 1) & 1) * auVar411._4_4_;
          auVar455._0_4_ = (uint)((byte)uVar283 & 1) * auVar411._0_4_;
          auVar455._8_4_ = (uint)((byte)(uVar283 >> 2) & 1) * auVar411._8_4_;
          auVar455._12_4_ = (uint)((byte)(uVar283 >> 3) & 1) * auVar411._12_4_;
          auVar455._16_4_ = (uint)((byte)(uVar283 >> 4) & 1) * auVar411._16_4_;
          auVar455._20_4_ = (uint)((byte)(uVar283 >> 5) & 1) * auVar411._20_4_;
          auVar455._24_4_ = (uint)((byte)(uVar283 >> 6) & 1) * auVar411._24_4_;
          auVar455._28_4_ = (uint)(byte)(uVar283 >> 7) * auVar411._28_4_;
          bVar11 = (byte)uVar283 | (byte)uVar1600;
          auVar411 = vorps_avx512vl(auVar455,auVar1516);
          auVar558 = vmovdqa32_avx512vl(auVar455);
          bVar14 = (bool)(bVar11 >> 1 & 1);
          bVar16 = (bool)(bVar11 >> 2 & 1);
          bVar18 = (bool)(bVar11 >> 3 & 1);
          bVar20 = (bool)(bVar11 >> 4 & 1);
          bVar22 = (bool)(bVar11 >> 5 & 1);
          bVar24 = (bool)(bVar11 >> 6 & 1);
          bVar12 = (bool)((byte)uVar282 & 1);
          auVar456._0_4_ =
               (uint)bVar12 * ((uint)bVar281 * auVar444._0_4_ | (uint)!bVar281 * auVar495._0_4_) |
               (uint)!bVar12 *
               ((uint)(bVar11 & 1) * auVar558._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar411._0_4_);
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar456._4_4_ =
               (uint)bVar281 * ((uint)bVar13 * auVar444._4_4_ | (uint)!bVar13 * auVar495._4_4_) |
               (uint)!bVar281 * ((uint)bVar14 * auVar558._4_4_ | (uint)!bVar14 * auVar411._4_4_);
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar456._8_4_ =
               (uint)bVar281 * ((uint)bVar15 * auVar444._8_4_ | (uint)!bVar15 * auVar495._8_4_) |
               (uint)!bVar281 * ((uint)bVar16 * auVar558._8_4_ | (uint)!bVar16 * auVar411._8_4_);
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar456._12_4_ =
               (uint)bVar281 * ((uint)bVar17 * auVar444._12_4_ | (uint)!bVar17 * auVar495._12_4_) |
               (uint)!bVar281 * ((uint)bVar18 * auVar558._12_4_ | (uint)!bVar18 * auVar411._12_4_);
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar456._16_4_ =
               (uint)bVar281 * ((uint)bVar19 * auVar444._16_4_ | (uint)!bVar19 * auVar495._16_4_) |
               (uint)!bVar281 * ((uint)bVar20 * auVar558._16_4_ | (uint)!bVar20 * auVar411._16_4_);
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar456._20_4_ =
               (uint)bVar281 * ((uint)bVar21 * auVar444._20_4_ | (uint)!bVar21 * auVar495._20_4_) |
               (uint)!bVar281 * ((uint)bVar22 * auVar558._20_4_ | (uint)!bVar22 * auVar411._20_4_);
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar456._24_4_ =
               (uint)bVar281 * ((uint)bVar23 * auVar444._24_4_ | (uint)!bVar23 * auVar495._24_4_) |
               (uint)!bVar281 * ((uint)bVar24 * auVar558._24_4_ | (uint)!bVar24 * auVar411._24_4_);
          bVar281 = SUB81(uVar282 >> 7,0);
          auVar456._28_4_ =
               (uint)bVar281 * ((uint)bVar25 * auVar444._28_4_ | (uint)!bVar25 * auVar495._28_4_) |
               (uint)!bVar281 *
               ((uint)(bVar11 >> 7) * auVar558._28_4_ | (uint)!(bool)(bVar11 >> 7) * auVar411._28_4_
               );
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar456;
          ptr = (float *)((long)ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        lVar280 = 0;
        auVar673._8_4_ = 0x80000000;
        auVar673._0_8_ = 0x8000000080000000;
        auVar673._12_4_ = 0x80000000;
        auVar734._8_4_ = 0x40490fdb;
        auVar734._0_8_ = 0x40490fdb40490fdb;
        auVar734._12_4_ = 0x40490fdb;
        auVar820._8_4_ = 0x7fffffff;
        auVar820._0_8_ = 0x7fffffff7fffffff;
        auVar820._12_4_ = 0x7fffffff;
        auVar912._8_4_ = 0x3f800000;
        auVar912._0_8_ = 0x3f8000003f800000;
        auVar912._12_4_ = 0x3f800000;
        auVar966._8_4_ = 0xbc83a25c;
        auVar966._0_8_ = 0xbc83a25cbc83a25c;
        auVar966._12_4_ = 0xbc83a25c;
        auVar1024._8_4_ = 0xbd99b01e;
        auVar1024._0_8_ = 0xbd99b01ebd99b01e;
        auVar1024._12_4_ = 0xbd99b01e;
        auVar1079._8_4_ = 0xbe117200;
        auVar1079._0_8_ = 0xbe117200be117200;
        auVar1079._12_4_ = 0xbe117200;
        auVar1132._8_4_ = 0xbeaaaa53;
        auVar1132._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1132._12_4_ = 0xbeaaaa53;
        auVar1179._8_4_ = 0x3b3ac537;
        auVar1179._0_8_ = 0x3b3ac5373b3ac537;
        auVar1179._12_4_ = 0x3b3ac537;
        auVar1229._8_4_ = 0x3d2edd4e;
        auVar1229._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1229._12_4_ = 0x3d2edd4e;
        auVar1277._8_4_ = 0x3dd9ed24;
        auVar1277._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1277._12_4_ = 0x3dd9ed24;
        auVar1331._8_4_ = 0x3e4cb974;
        auVar1331._0_8_ = 0x3e4cb9743e4cb974;
        auVar1331._12_4_ = 0x3e4cb974;
        auVar1385._8_4_ = 0x3fc90fdb;
        auVar1385._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1385._12_4_ = 0x3fc90fdb;
        auVar1439._8_4_ = 0x40490fdb;
        auVar1439._0_8_ = 0x40490fdb40490fdb;
        auVar1439._12_4_ = 0x40490fdb;
        auVar287 = ZEXT816(0) << 0x20;
        auVar1546._8_4_ = 0x3fc90fdb;
        auVar1546._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1546._12_4_ = 0x3fc90fdb;
        for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
            uVar283 = (ulong)((int)uVar283 + 1)) {
          auVar350 = *(undefined1 (*) [16])(*(undefined1 (*) [32])ptr + lVar280 * 4);
          auVar351 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + uVar279 * 4 + lVar280)));
          uVar282 = vcmpps_avx512vl(auVar351,auVar287,4);
          uVar284 = vcmpps_avx512vl(auVar351,auVar287,1);
          auVar40._8_4_ = 0xc0490fdb;
          auVar40._0_8_ = 0xc0490fdbc0490fdb;
          auVar40._12_4_ = 0xc0490fdb;
          auVar354 = vblendmps_avx512vl(auVar734,auVar40);
          bVar281 = (bool)((byte)uVar284 & 1);
          auVar320._0_4_ = (uint)bVar281 * auVar354._0_4_ | (uint)!bVar281 * in_ZMM18._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar320._4_4_ = (uint)bVar281 * auVar354._4_4_ | (uint)!bVar281 * in_ZMM18._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar320._8_4_ = (uint)bVar281 * auVar354._8_4_ | (uint)!bVar281 * in_ZMM18._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar320._12_4_ = (uint)bVar281 * auVar354._12_4_ | (uint)!bVar281 * in_ZMM18._12_4_;
          in_ZMM18 = ZEXT1664(auVar320);
          uVar284 = vcmpps_avx512vl(auVar350,auVar287,4);
          uVar284 = uVar282 & uVar284;
          auVar354 = vandps_avx512vl(auVar351,auVar673);
          auVar351 = vdivps_avx512vl(auVar351,auVar350);
          auVar355 = vandps_avx512vl(auVar351,auVar820);
          uVar285 = vcmpps_avx512vl(auVar912,auVar355,1);
          auVar41._8_4_ = 0xbf800000;
          auVar41._0_8_ = 0xbf800000bf800000;
          auVar41._12_4_ = 0xbf800000;
          auVar356 = vblendmps_avx512vl(auVar355,auVar41);
          bVar11 = (byte)uVar285;
          auVar321._0_4_ =
               (uint)(bVar11 & 1) * auVar356._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
          bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
          auVar321._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
          bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
          auVar321._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
          bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
          auVar321._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
          uVar33 = vcmpps_avx512vl(auVar350,auVar287,1);
          auVar355 = vdivps_avx512vl(auVar321,auVar355);
          auVar322._0_4_ =
               (uint)(bVar11 & 1) * auVar355._0_4_ | !(bool)(bVar11 & 1) * auVar321._0_4_;
          bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
          auVar322._4_4_ = (uint)bVar281 * auVar355._4_4_ | !bVar281 * auVar321._4_4_;
          bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
          auVar322._8_4_ = (uint)bVar281 * auVar355._8_4_ | !bVar281 * auVar321._8_4_;
          bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
          auVar322._12_4_ = (uint)bVar281 * auVar355._12_4_ | !bVar281 * auVar321._12_4_;
          in_ZMM21 = ZEXT1664(auVar322);
          auVar355 = vmulps_avx512vl(auVar322,auVar322);
          auVar356 = vmulps_avx512vl(auVar355,auVar355);
          auVar359 = vfmadd213ps_avx512vl(auVar966,auVar356,auVar1024);
          auVar359 = vfmadd213ps_avx512vl(auVar359,auVar356,auVar1079);
          auVar359 = vfmadd213ps_avx512vl(auVar359,auVar356,auVar1132);
          auVar360 = vfmadd213ps_avx512vl(auVar1179,auVar356,auVar1229);
          auVar360 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1277);
          auVar360 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1331);
          auVar356 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar912);
          auVar355 = vfmadd231ps_avx512vl(auVar356,auVar355,auVar359);
          auVar355 = vmulps_avx512vl(auVar355,auVar322);
          auVar356 = vaddps_avx512vl(auVar355,auVar1385);
          auVar323._0_4_ =
               (uint)(bVar11 & 1) * auVar356._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar355._0_4_;
          bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
          auVar323._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * auVar355._4_4_;
          bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
          auVar323._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * auVar355._8_4_;
          bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
          auVar323._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * auVar355._12_4_;
          auVar351 = vpternlogd_avx512vl(auVar323,auVar351,auVar673,0xf8);
          auVar355 = vaddps_avx512vl(auVar351,auVar320);
          bVar281 = (bool)((byte)uVar33 & 1);
          bVar14 = (bool)((byte)(uVar33 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar33 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar33 >> 3) & 1);
          auVar350 = vpternlogd_avx512vl(auVar350,auVar1439,auVar673,0xec);
          uVar1600 = vcmpps_avx512vl(auVar287,auVar350,2);
          auVar350 = vorps_avx512vl(auVar354,auVar1546);
          auVar324._4_4_ = (uint)((byte)(uVar282 >> 1) & 1) * auVar350._4_4_;
          auVar324._0_4_ = (uint)((byte)uVar282 & 1) * auVar350._0_4_;
          auVar324._8_4_ = (uint)((byte)(uVar282 >> 2) & 1) * auVar350._8_4_;
          auVar324._12_4_ = (uint)((byte)(uVar282 >> 3) & 1) * auVar350._12_4_;
          uVar34 = (ushort)uVar282 | (ushort)uVar1600;
          auVar350 = vorps_avx512vl(auVar324,auVar1439);
          auVar354 = vmovdqa32_avx512vl(auVar324);
          bVar12 = (bool)((byte)uVar34 & 1);
          bVar15 = (bool)((byte)(uVar34 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar34 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar34 >> 3) & 1);
          bVar13 = (bool)((byte)uVar284 & 1);
          auVar325._0_4_ =
               (uint)bVar13 * ((uint)bVar281 * auVar355._0_4_ | (uint)!bVar281 * auVar351._0_4_) |
               (uint)!bVar13 * ((uint)bVar12 * auVar354._0_4_ | (uint)!bVar12 * auVar350._0_4_);
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar325._4_4_ =
               (uint)bVar281 * ((uint)bVar14 * auVar355._4_4_ | (uint)!bVar14 * auVar351._4_4_) |
               (uint)!bVar281 * ((uint)bVar15 * auVar354._4_4_ | (uint)!bVar15 * auVar350._4_4_);
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar325._8_4_ =
               (uint)bVar281 * ((uint)bVar16 * auVar355._8_4_ | (uint)!bVar16 * auVar351._8_4_) |
               (uint)!bVar281 * ((uint)bVar17 * auVar354._8_4_ | (uint)!bVar17 * auVar350._8_4_);
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar325._12_4_ =
               (uint)bVar281 * ((uint)bVar18 * auVar355._12_4_ | (uint)!bVar18 * auVar351._12_4_) |
               (uint)!bVar281 * ((uint)bVar19 * auVar354._12_4_ | (uint)!bVar19 * auVar350._12_4_);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar325;
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (bw == 1) {
        auVar632 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        uVar1603 = auVar632._0_4_;
        uVar1596 = auVar632._4_4_;
        uVar1600 = auVar632._8_8_;
        uVar1602 = auVar632._16_8_;
        uVar669 = auVar632._24_8_;
        uVar726 = auVar632._32_8_;
        uVar728 = auVar632._40_8_;
        uStack_108 = auVar632._48_8_;
        uStack_100 = auVar632._56_8_;
        for (iVar278 = 0xf; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
          auVar632._4_4_ = uVar1596;
          auVar632._0_4_ = uVar1603;
          auVar632._8_8_ = uVar1600;
          auVar632._16_8_ = uVar1602;
          auVar632._24_8_ = uVar669;
          auVar632._32_8_ = uVar726;
          auVar632._40_8_ = uVar728;
          auVar632._48_8_ = uStack_108;
          auVar632._56_8_ = uStack_100;
          y_02[1] = (float)in_stack_fffffffffffffe7c._0_4_;
          y_02[2] = (float)in_stack_fffffffffffffe7c._4_4_;
          y_02[3] = (float)in_stack_fffffffffffffe7c._8_4_;
          y_02[0] = (float)in_stack_fffffffffffffe78;
          y_02._16_8_ = outptr;
          y_02[6] = (float)(int)in_stack_fffffffffffffe90;
          y_02[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
          y_02[8] = (float)in_stack_fffffffffffffe98._0_4_;
          y_02[9] = (float)in_stack_fffffffffffffe98._4_4_;
          y_02[10] = (float)in_stack_fffffffffffffe98._8_4_;
          y_02[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
          y_02[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
          y_02[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
          y_02[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
          y_02[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
          x_02[4] = (float)uVar1603;
          x_02[0] = (float)in_stack_fffffffffffffeb8._0_4_;
          x_02[1] = (float)in_stack_fffffffffffffeb8._4_4_;
          x_02[2] = (float)in_stack_fffffffffffffeb8._8_4_;
          x_02[3] = (float)in_stack_fffffffffffffeb8._12_4_;
          x_02[5] = (float)uVar1596;
          x_02[6] = (float)(int)uVar1600;
          x_02[7] = (float)(int)((ulong)uVar1600 >> 0x20);
          x_02[8] = (float)(int)uVar1602;
          x_02[9] = (float)(int)((ulong)uVar1602 >> 0x20);
          x_02[10] = (float)(int)uVar669;
          x_02[0xb] = (float)(int)((ulong)uVar669 >> 0x20);
          x_02[0xc] = (float)(int)uVar726;
          x_02[0xd] = (float)(int)((ulong)uVar726 >> 0x20);
          x_02[0xe] = (float)(int)uVar728;
          x_02[0xf] = (float)(int)((ulong)uVar728 >> 0x20);
          atan2512_ps(__return_storage_ptr__,y_02,x_02);
          *(undefined1 (*) [64])outptr = auVar632;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
        }
        fVar666 = *ptr1;
        auVar702._4_4_ = fVar666;
        auVar702._0_4_ = fVar666;
        auVar702._8_4_ = fVar666;
        auVar702._12_4_ = fVar666;
        auVar702._16_4_ = fVar666;
        auVar702._20_4_ = fVar666;
        auVar702._24_4_ = fVar666;
        auVar702._28_4_ = fVar666;
        auVar287 = ZEXT816(0) << 0x40;
        auVar103._8_4_ = 0x80000000;
        auVar103._0_8_ = 0x8000000080000000;
        auVar103._12_4_ = 0x80000000;
        auVar103._16_4_ = 0x80000000;
        auVar103._20_4_ = 0x80000000;
        auVar103._24_4_ = 0x80000000;
        auVar103._28_4_ = 0x80000000;
        vandps_avx512vl(auVar702,auVar103);
        uVar279 = vcmpps_avx512vl(auVar702,ZEXT1632(auVar287),4);
        uVar283 = vcmpps_avx512vl(auVar702,ZEXT1632(auVar287),1);
        auVar411 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar439._0_4_ = (uint)bVar281 * auVar411._0_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar439._4_4_ = (uint)bVar281 * auVar411._4_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar439._8_4_ = (uint)bVar281 * auVar411._8_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar439._12_4_ = (uint)bVar281 * auVar411._12_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar439._16_4_ = (uint)bVar281 * auVar411._16_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar439._20_4_ = (uint)bVar281 * auVar411._20_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar439._24_4_ = (uint)bVar281 * auVar411._24_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar439._28_4_ = (uint)bVar281 * auVar411._28_4_ | (uint)!bVar281 * 0x40490fdb;
        auVar104._8_4_ = 0x3fc90fdb;
        auVar104._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar104._12_4_ = 0x3fc90fdb;
        auVar104._16_4_ = 0x3fc90fdb;
        auVar104._20_4_ = 0x3fc90fdb;
        auVar104._24_4_ = 0x3fc90fdb;
        auVar104._28_4_ = 0x3fc90fdb;
        auVar411 = vorps_avx512vl(auVar632._0_32_,auVar104);
        auVar440._4_4_ = (uint)((byte)(uVar279 >> 1) & 1) * auVar411._4_4_;
        auVar440._0_4_ = (uint)((byte)uVar279 & 1) * auVar411._0_4_;
        auVar440._8_4_ = (uint)((byte)(uVar279 >> 2) & 1) * auVar411._8_4_;
        auVar440._12_4_ = (uint)((byte)(uVar279 >> 3) & 1) * auVar411._12_4_;
        auVar440._16_4_ = (uint)((byte)(uVar279 >> 4) & 1) * auVar411._16_4_;
        auVar440._20_4_ = (uint)((byte)(uVar279 >> 5) & 1) * auVar411._20_4_;
        auVar440._24_4_ = (uint)((byte)(uVar279 >> 6) & 1) * auVar411._24_4_;
        auVar440._28_4_ = (uint)(byte)(uVar279 >> 7) * auVar411._28_4_;
        auVar992._8_4_ = 0x80000000;
        auVar992._0_8_ = 0x8000000080000000;
        auVar992._12_4_ = 0x80000000;
        auVar992._16_4_ = 0x80000000;
        auVar992._20_4_ = 0x80000000;
        auVar992._24_4_ = 0x80000000;
        auVar992._28_4_ = 0x80000000;
        auVar1047._8_4_ = 0x7fffffff;
        auVar1047._0_8_ = 0x7fffffff7fffffff;
        auVar1047._12_4_ = 0x7fffffff;
        auVar1047._16_4_ = 0x7fffffff;
        auVar1047._20_4_ = 0x7fffffff;
        auVar1047._24_4_ = 0x7fffffff;
        auVar1047._28_4_ = 0x7fffffff;
        auVar1101._8_4_ = 0x3f800000;
        auVar1101._0_8_ = 0x3f8000003f800000;
        auVar1101._12_4_ = 0x3f800000;
        auVar1101._16_4_ = 0x3f800000;
        auVar1101._20_4_ = 0x3f800000;
        auVar1101._24_4_ = 0x3f800000;
        auVar1101._28_4_ = 0x3f800000;
        auVar1152._8_4_ = 0xbc83a25c;
        auVar1152._0_8_ = 0xbc83a25cbc83a25c;
        auVar1152._12_4_ = 0xbc83a25c;
        auVar1152._16_4_ = 0xbc83a25c;
        auVar1152._20_4_ = 0xbc83a25c;
        auVar1152._24_4_ = 0xbc83a25c;
        auVar1152._28_4_ = 0xbc83a25c;
        auVar1201._8_4_ = 0xbd99b01e;
        auVar1201._0_8_ = 0xbd99b01ebd99b01e;
        auVar1201._12_4_ = 0xbd99b01e;
        auVar1201._16_4_ = 0xbd99b01e;
        auVar1201._20_4_ = 0xbd99b01e;
        auVar1201._24_4_ = 0xbd99b01e;
        auVar1201._28_4_ = 0xbd99b01e;
        auVar1251._8_4_ = 0xbe117200;
        auVar1251._0_8_ = 0xbe117200be117200;
        auVar1251._12_4_ = 0xbe117200;
        auVar1251._16_4_ = 0xbe117200;
        auVar1251._20_4_ = 0xbe117200;
        auVar1251._24_4_ = 0xbe117200;
        auVar1251._28_4_ = 0xbe117200;
        auVar1299._8_4_ = 0xbeaaaa53;
        auVar1299._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1299._12_4_ = 0xbeaaaa53;
        auVar1299._16_4_ = 0xbeaaaa53;
        auVar1299._20_4_ = 0xbeaaaa53;
        auVar1299._24_4_ = 0xbeaaaa53;
        auVar1299._28_4_ = 0xbeaaaa53;
        auVar1353._8_4_ = 0x3b3ac537;
        auVar1353._0_8_ = 0x3b3ac5373b3ac537;
        auVar1353._12_4_ = 0x3b3ac537;
        auVar1353._16_4_ = 0x3b3ac537;
        auVar1353._20_4_ = 0x3b3ac537;
        auVar1353._24_4_ = 0x3b3ac537;
        auVar1353._28_4_ = 0x3b3ac537;
        auVar1407._8_4_ = 0x3d2edd4e;
        auVar1407._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1407._12_4_ = 0x3d2edd4e;
        auVar1407._16_4_ = 0x3d2edd4e;
        auVar1407._20_4_ = 0x3d2edd4e;
        auVar1407._24_4_ = 0x3d2edd4e;
        auVar1407._28_4_ = 0x3d2edd4e;
        auVar1461._8_4_ = 0x3dd9ed24;
        auVar1461._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1461._12_4_ = 0x3dd9ed24;
        auVar1461._16_4_ = 0x3dd9ed24;
        auVar1461._20_4_ = 0x3dd9ed24;
        auVar1461._24_4_ = 0x3dd9ed24;
        auVar1461._28_4_ = 0x3dd9ed24;
        auVar1514._8_4_ = 0x3e4cb974;
        auVar1514._0_8_ = 0x3e4cb9743e4cb974;
        auVar1514._12_4_ = 0x3e4cb974;
        auVar1514._16_4_ = 0x3e4cb974;
        auVar1514._20_4_ = 0x3e4cb974;
        auVar1514._24_4_ = 0x3e4cb974;
        auVar1514._28_4_ = 0x3e4cb974;
        auVar1567._8_4_ = 0x3fc90fdb;
        auVar1567._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1567._12_4_ = 0x3fc90fdb;
        auVar1567._16_4_ = 0x3fc90fdb;
        auVar1567._20_4_ = 0x3fc90fdb;
        auVar1567._24_4_ = 0x3fc90fdb;
        auVar1567._28_4_ = 0x3fc90fdb;
        iVar278 = iVar278 + -0xc;
        auVar411 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
        auVar495 = vorps_avx512vl(auVar440,auVar411);
        for (; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
          auVar444 = *(undefined1 (*) [32])ptr;
          auVar558 = vdivps_avx512vl(auVar702,auVar444);
          vandps_avx512vl(auVar558,auVar1047);
          uVar283 = vcmpps_avx512vl(auVar1101,auVar558,1);
          auVar105._8_4_ = 0xbf800000;
          auVar105._0_8_ = 0xbf800000bf800000;
          auVar105._12_4_ = 0xbf800000;
          auVar105._16_4_ = 0xbf800000;
          auVar105._20_4_ = 0xbf800000;
          auVar105._24_4_ = 0xbf800000;
          auVar105._28_4_ = 0xbf800000;
          auVar498 = vblendmps_avx512vl(auVar558,auVar105);
          bVar11 = (byte)uVar283;
          auVar441._0_4_ =
               (uint)(bVar11 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar441._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar441._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar441._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar441._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * in_ZMM21._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar441._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * in_ZMM21._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar441._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * in_ZMM21._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar441._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * in_ZMM21._28_4_;
          auVar498 = vdivps_avx512vl(auVar441,auVar558);
          auVar442._0_4_ =
               (uint)(bVar11 & 1) * auVar498._0_4_ | !(bool)(bVar11 & 1) * auVar441._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar442._4_4_ = (uint)bVar281 * auVar498._4_4_ | !bVar281 * auVar441._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar442._8_4_ = (uint)bVar281 * auVar498._8_4_ | !bVar281 * auVar441._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar442._12_4_ = (uint)bVar281 * auVar498._12_4_ | !bVar281 * auVar441._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar442._16_4_ = (uint)bVar281 * auVar498._16_4_ | !bVar281 * auVar441._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar442._20_4_ = (uint)bVar281 * auVar498._20_4_ | !bVar281 * auVar441._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar442._24_4_ = (uint)bVar281 * auVar498._24_4_ | !bVar281 * auVar441._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar442._28_4_ = (uint)bVar281 * auVar498._28_4_ | !bVar281 * auVar441._28_4_;
          in_ZMM21 = ZEXT3264(auVar442);
          auVar504 = ZEXT1632(auVar287);
          uVar282 = vcmpps_avx512vl(auVar444,auVar504,4);
          uVar282 = uVar279 & uVar282;
          uVar284 = vcmpps_avx512vl(auVar444,auVar504,1);
          auVar498 = vmulps_avx512vl(auVar442,auVar442);
          auVar499 = vmulps_avx512vl(auVar498,auVar498);
          auVar502 = vfmadd213ps_avx512vl(auVar1152,auVar499,auVar1201);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1251);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1299);
          auVar503 = vfmadd213ps_avx512vl(auVar1353,auVar499,auVar1407);
          auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1461);
          auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1514);
          auVar499 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1101);
          auVar498 = vfmadd231ps_avx512vl(auVar499,auVar498,auVar502);
          auVar498 = vmulps_avx512vl(auVar498,auVar442);
          auVar499 = vaddps_avx512vl(auVar498,auVar1567);
          auVar443._0_4_ =
               (uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar498._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar443._4_4_ = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * auVar498._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar443._8_4_ = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * auVar498._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar443._12_4_ = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * auVar498._12_4_;
          bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
          auVar443._16_4_ = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * auVar498._16_4_;
          bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
          auVar443._20_4_ = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * auVar498._20_4_;
          bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
          auVar443._24_4_ = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * auVar498._24_4_;
          bVar281 = SUB81(uVar283 >> 7,0);
          auVar443._28_4_ = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * auVar498._28_4_;
          auVar558 = vpternlogd_avx512vl(auVar443,auVar558,auVar992,0xf8);
          auVar498 = vaddps_avx512vl(auVar558,auVar439);
          bVar281 = (bool)((byte)uVar284 & 1);
          bVar13 = (bool)((byte)(uVar284 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar284 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar284 >> 3) & 1);
          bVar22 = (bool)((byte)(uVar284 >> 4) & 1);
          bVar25 = (bool)((byte)(uVar284 >> 5) & 1);
          bVar26 = (bool)((byte)(uVar284 >> 6) & 1);
          bVar31 = SUB81(uVar284 >> 7,0);
          auVar444 = vpternlogd_avx512vl(auVar444,auVar411,auVar992,0xec);
          uVar1600 = vcmpps_avx512vl(auVar504,auVar444,2);
          bVar11 = (byte)uVar279 | (byte)uVar1600;
          auVar499 = vpblendmd_avx512vl(auVar495,auVar440);
          bVar14 = (bool)(bVar11 >> 1 & 1);
          bVar17 = (bool)(bVar11 >> 2 & 1);
          bVar20 = (bool)(bVar11 >> 3 & 1);
          bVar23 = (bool)(bVar11 >> 4 & 1);
          bVar29 = (bool)(bVar11 >> 5 & 1);
          bVar27 = (bool)(bVar11 >> 6 & 1);
          bVar12 = (bool)((byte)uVar282 & 1);
          bVar15 = (bool)((byte)(uVar282 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar282 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar282 >> 3) & 1);
          bVar24 = (bool)((byte)(uVar282 >> 4) & 1);
          bVar30 = (bool)((byte)(uVar282 >> 5) & 1);
          bVar28 = (bool)((byte)(uVar282 >> 6) & 1);
          bVar32 = SUB81(uVar282 >> 7,0);
          *(uint *)*(undefined1 (*) [64])outptr =
               (uint)bVar12 * ((uint)bVar281 * auVar498._0_4_ | (uint)!bVar281 * auVar558._0_4_) |
               (uint)!bVar12 *
               ((uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar444._0_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
               (uint)bVar15 * ((uint)bVar13 * auVar498._4_4_ | (uint)!bVar13 * auVar558._4_4_) |
               (uint)!bVar15 * ((uint)bVar14 * auVar499._4_4_ | (uint)!bVar14 * auVar444._4_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
               (uint)bVar18 * ((uint)bVar16 * auVar498._8_4_ | (uint)!bVar16 * auVar558._8_4_) |
               (uint)!bVar18 * ((uint)bVar17 * auVar499._8_4_ | (uint)!bVar17 * auVar444._8_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
               (uint)bVar21 * ((uint)bVar19 * auVar498._12_4_ | (uint)!bVar19 * auVar558._12_4_) |
               (uint)!bVar21 * ((uint)bVar20 * auVar499._12_4_ | (uint)!bVar20 * auVar444._12_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
               (uint)bVar24 * ((uint)bVar22 * auVar498._16_4_ | (uint)!bVar22 * auVar558._16_4_) |
               (uint)!bVar24 * ((uint)bVar23 * auVar499._16_4_ | (uint)!bVar23 * auVar444._16_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
               (uint)bVar30 * ((uint)bVar25 * auVar498._20_4_ | (uint)!bVar25 * auVar558._20_4_) |
               (uint)!bVar30 * ((uint)bVar29 * auVar499._20_4_ | (uint)!bVar29 * auVar444._20_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
               (uint)bVar28 * ((uint)bVar26 * auVar498._24_4_ | (uint)!bVar26 * auVar558._24_4_) |
               (uint)!bVar28 * ((uint)bVar27 * auVar499._24_4_ | (uint)!bVar27 * auVar444._24_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
               (uint)bVar32 * ((uint)bVar31 * auVar498._28_4_ | (uint)!bVar31 * auVar558._28_4_) |
               (uint)!bVar32 *
               ((uint)(bVar11 >> 7) * auVar499._28_4_ | (uint)!(bool)(bVar11 >> 7) * auVar444._28_4_
               );
          ptr = (float *)((long)ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
        fVar666 = *ptr1;
        auVar672._4_4_ = fVar666;
        auVar672._0_4_ = fVar666;
        auVar672._8_4_ = fVar666;
        auVar672._12_4_ = fVar666;
        auVar351 = ZEXT416(0) << 0x40;
        auVar42._8_4_ = 0x80000000;
        auVar42._0_8_ = 0x8000000080000000;
        auVar42._12_4_ = 0x80000000;
        auVar287 = vandps_avx512vl(auVar672,auVar42);
        uVar279 = vcmpps_avx512vl(auVar672,auVar351,4);
        uVar283 = vcmpps_avx512vl(auVar672,auVar351,1);
        auVar350 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar315._0_4_ = (uint)bVar281 * auVar350._0_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar315._4_4_ = (uint)bVar281 * auVar350._4_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar315._8_4_ = (uint)bVar281 * auVar350._8_4_ | (uint)!bVar281 * 0x40490fdb;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar315._12_4_ = (uint)bVar281 * auVar350._12_4_ | (uint)!bVar281 * 0x40490fdb;
        auVar43._8_4_ = 0x3fc90fdb;
        auVar43._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar43._12_4_ = 0x3fc90fdb;
        auVar287 = vorps_avx512vl(auVar287,auVar43);
        auVar316._4_4_ = (uint)((byte)(uVar279 >> 1) & 1) * auVar287._4_4_;
        auVar316._0_4_ = (uint)((byte)uVar279 & 1) * auVar287._0_4_;
        auVar316._8_4_ = (uint)((byte)(uVar279 >> 2) & 1) * auVar287._8_4_;
        auVar316._12_4_ = (uint)((byte)(uVar279 >> 3) & 1) * auVar287._12_4_;
        auVar965._8_4_ = 0x80000000;
        auVar965._0_8_ = 0x8000000080000000;
        auVar965._12_4_ = 0x80000000;
        auVar1023._8_4_ = 0x7fffffff;
        auVar1023._0_8_ = 0x7fffffff7fffffff;
        auVar1023._12_4_ = 0x7fffffff;
        auVar1078._8_4_ = 0x3f800000;
        auVar1078._0_8_ = 0x3f8000003f800000;
        auVar1078._12_4_ = 0x3f800000;
        auVar1131._8_4_ = 0xbc83a25c;
        auVar1131._0_8_ = 0xbc83a25cbc83a25c;
        auVar1131._12_4_ = 0xbc83a25c;
        auVar1178._8_4_ = 0xbd99b01e;
        auVar1178._0_8_ = 0xbd99b01ebd99b01e;
        auVar1178._12_4_ = 0xbd99b01e;
        auVar1228._8_4_ = 0xbe117200;
        auVar1228._0_8_ = 0xbe117200be117200;
        auVar1228._12_4_ = 0xbe117200;
        auVar1276._8_4_ = 0xbeaaaa53;
        auVar1276._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1276._12_4_ = 0xbeaaaa53;
        auVar1330._8_4_ = 0x3b3ac537;
        auVar1330._0_8_ = 0x3b3ac5373b3ac537;
        auVar1330._12_4_ = 0x3b3ac537;
        auVar1384._8_4_ = 0x3d2edd4e;
        auVar1384._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1384._12_4_ = 0x3d2edd4e;
        auVar1438._8_4_ = 0x3dd9ed24;
        auVar1438._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1438._12_4_ = 0x3dd9ed24;
        auVar1492._8_4_ = 0x3e4cb974;
        auVar1492._0_8_ = 0x3e4cb9743e4cb974;
        auVar1492._12_4_ = 0x3e4cb974;
        auVar1545._8_4_ = 0x3fc90fdb;
        auVar1545._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1545._12_4_ = 0x3fc90fdb;
        lVar280 = 0;
        auVar287 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
        auVar350 = vorps_avx512vl(auVar316,auVar287);
        for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
          auVar354 = *(undefined1 (*) [16])(*(undefined1 (*) [32])ptr + lVar280 * 4);
          auVar355 = vdivps_avx512vl(auVar672,auVar354);
          auVar356 = vandps_avx512vl(auVar355,auVar1023);
          uVar283 = vcmpps_avx512vl(auVar1078,auVar356,1);
          auVar44._8_4_ = 0xbf800000;
          auVar44._0_8_ = 0xbf800000bf800000;
          auVar44._12_4_ = 0xbf800000;
          auVar359 = vblendmps_avx512vl(auVar356,auVar44);
          bVar11 = (byte)uVar283;
          auVar317._0_4_ =
               (uint)(bVar11 & 1) * auVar359._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar317._4_4_ = (uint)bVar281 * auVar359._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar317._8_4_ = (uint)bVar281 * auVar359._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar317._12_4_ = (uint)bVar281 * auVar359._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
          uVar282 = vcmpps_avx512vl(auVar354,auVar351,4);
          uVar282 = uVar279 & uVar282;
          uVar284 = vcmpps_avx512vl(auVar354,auVar351,1);
          auVar356 = vdivps_avx512vl(auVar317,auVar356);
          auVar318._0_4_ =
               (uint)(bVar11 & 1) * auVar356._0_4_ | !(bool)(bVar11 & 1) * auVar317._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar318._4_4_ = (uint)bVar281 * auVar356._4_4_ | !bVar281 * auVar317._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar318._8_4_ = (uint)bVar281 * auVar356._8_4_ | !bVar281 * auVar317._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar318._12_4_ = (uint)bVar281 * auVar356._12_4_ | !bVar281 * auVar317._12_4_;
          in_ZMM21 = ZEXT1664(auVar318);
          auVar356 = vmulps_avx512vl(auVar318,auVar318);
          auVar359 = vmulps_avx512vl(auVar356,auVar356);
          auVar360 = vfmadd213ps_avx512vl(auVar1131,auVar359,auVar1178);
          auVar360 = vfmadd213ps_avx512vl(auVar360,auVar359,auVar1228);
          auVar360 = vfmadd213ps_avx512vl(auVar360,auVar359,auVar1276);
          auVar395 = vfmadd213ps_avx512vl(auVar1330,auVar359,auVar1384);
          auVar395 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar1438);
          auVar395 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar1492);
          auVar359 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar1078);
          auVar356 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar360);
          auVar356 = vmulps_avx512vl(auVar356,auVar318);
          auVar359 = vaddps_avx512vl(auVar356,auVar1545);
          auVar319._0_4_ =
               (uint)(bVar11 & 1) * auVar359._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar356._0_4_;
          bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
          auVar319._4_4_ = (uint)bVar281 * auVar359._4_4_ | (uint)!bVar281 * auVar356._4_4_;
          bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
          auVar319._8_4_ = (uint)bVar281 * auVar359._8_4_ | (uint)!bVar281 * auVar356._8_4_;
          bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
          auVar319._12_4_ = (uint)bVar281 * auVar359._12_4_ | (uint)!bVar281 * auVar356._12_4_;
          auVar355 = vpternlogd_avx512vl(auVar319,auVar355,auVar965,0xf8);
          auVar356 = vaddps_avx512vl(auVar355,auVar315);
          bVar281 = (bool)((byte)uVar284 & 1);
          bVar14 = (bool)((byte)(uVar284 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar284 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar354 = vpternlogd_avx512vl(auVar354,auVar287,auVar965,0xec);
          uVar1600 = vcmpps_avx512vl(auVar351,auVar354,2);
          uVar34 = (ushort)uVar279 | (ushort)uVar1600;
          auVar359 = vpblendmd_avx512vl(auVar350,auVar316);
          bVar12 = (bool)((byte)uVar34 & 1);
          bVar15 = (bool)((byte)(uVar34 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar34 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar34 >> 3) & 1);
          bVar13 = (bool)((byte)uVar282 & 1);
          bVar16 = (bool)((byte)(uVar282 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar282 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar282 >> 3) & 1);
          pfVar1599 = (float *)((long)*(undefined1 (*) [64])outptr + lVar280 * 4);
          *pfVar1599 = (float)((uint)bVar13 *
                               ((uint)bVar281 * auVar356._0_4_ | (uint)!bVar281 * auVar355._0_4_) |
                              (uint)!bVar13 *
                              ((uint)bVar12 * auVar359._0_4_ | (uint)!bVar12 * auVar354._0_4_));
          pfVar1599[1] = (float)((uint)bVar16 *
                                 ((uint)bVar14 * auVar356._4_4_ | (uint)!bVar14 * auVar355._4_4_) |
                                (uint)!bVar16 *
                                ((uint)bVar15 * auVar359._4_4_ | (uint)!bVar15 * auVar354._4_4_));
          pfVar1599[2] = (float)((uint)bVar19 *
                                 ((uint)bVar17 * auVar356._8_4_ | (uint)!bVar17 * auVar355._8_4_) |
                                (uint)!bVar19 *
                                ((uint)bVar18 * auVar359._8_4_ | (uint)!bVar18 * auVar354._8_4_));
          pfVar1599[3] = (float)((uint)bVar22 *
                                 ((uint)bVar20 * auVar356._12_4_ | (uint)!bVar20 * auVar355._12_4_)
                                | (uint)!bVar22 *
                                  ((uint)bVar21 * auVar359._12_4_ | (uint)!bVar21 * auVar354._12_4_)
                                );
          lVar280 = lVar280 + 4;
        }
        return;
      }
      if (aw != 1) {
        return;
      }
      pfVar1599 = ptr1;
      if (iVar276 == 0x10) {
        auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
        auVar1594 = vmovdqu64_avx512f(auVar1594);
        uVar1603 = auVar1594._0_4_;
        uVar1596 = auVar1594._4_4_;
        in_stack_fffffffffffffed0 = auVar1594._8_8_;
        in_stack_fffffffffffffed8 = auVar1594._16_8_;
        in_stack_fffffffffffffee0 = auVar1594._24_8_;
        in_stack_fffffffffffffee8 = auVar1594._32_8_;
        in_stack_fffffffffffffef0 = auVar1594._40_8_;
        iVar277 = iVar278;
        while( true ) {
          pfVar1599 = (float *)CONCAT44(uVar1596,uVar1603);
          bVar281 = iVar277 == 0;
          iVar277 = iVar277 + -1;
          if (bVar281) break;
          auVar1594 = vpbroadcastd_avx512f(ZEXT416((uint)*ptr1));
          y_06[1] = (float)in_stack_fffffffffffffe7c._0_4_;
          y_06[2] = (float)in_stack_fffffffffffffe7c._4_4_;
          y_06[3] = (float)in_stack_fffffffffffffe7c._8_4_;
          y_06[0] = (float)in_stack_fffffffffffffe78;
          y_06._16_8_ = outptr;
          y_06[6] = (float)(int)in_stack_fffffffffffffe90;
          y_06[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
          y_06[8] = (float)in_stack_fffffffffffffe98._0_4_;
          y_06[9] = (float)in_stack_fffffffffffffe98._4_4_;
          y_06[10] = (float)in_stack_fffffffffffffe98._8_4_;
          y_06[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
          y_06[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
          y_06[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
          y_06[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
          y_06[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
          x_06[4] = (float)uVar1603;
          x_06[0] = (float)in_stack_fffffffffffffeb8._0_4_;
          x_06[1] = (float)in_stack_fffffffffffffeb8._4_4_;
          x_06[2] = (float)in_stack_fffffffffffffeb8._8_4_;
          x_06[3] = (float)in_stack_fffffffffffffeb8._12_4_;
          x_06[5] = (float)uVar1596;
          x_06[6] = (float)(int)in_stack_fffffffffffffed0;
          x_06[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
          x_06[8] = (float)(int)in_stack_fffffffffffffed8;
          x_06[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
          x_06[10] = (float)(int)in_stack_fffffffffffffee0;
          x_06[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
          x_06[0xc] = (float)(int)in_stack_fffffffffffffee8;
          x_06[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          x_06[0xe] = (float)(int)in_stack_fffffffffffffef0;
          x_06[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
          atan2512_ps(__return_storage_ptr__,y_06,x_06);
          auVar1594 = vmovdqu64_avx512f(auVar1594);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
        }
      }
      if (iVar276 == 8) {
        auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        auVar1594 = vmovdqu64_avx512f(auVar1594);
        uVar1600 = auVar1594._0_8_;
        uVar1602 = auVar1594._8_8_;
        auVar287 = auVar1594._16_16_;
        auVar350 = auVar1594._32_16_;
        auVar351 = auVar1594._48_16_;
        iVar277 = 0;
        while( true ) {
          if (iVar278 <= iVar277 + 1) break;
          fVar666 = *ptr1;
          fVar667 = ptr1[1];
          auVar803._4_4_ = fVar667;
          auVar803._0_4_ = fVar667;
          auVar803._8_4_ = fVar667;
          auVar803._12_4_ = fVar667;
          auVar803._16_4_ = fVar667;
          auVar803._20_4_ = fVar667;
          auVar803._24_4_ = fVar667;
          auVar803._28_4_ = fVar667;
          auVar1594 = vinserti64x4_avx512f
                                (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar803,
                                 1);
          y_13[1] = (float)in_stack_fffffffffffffe7c._0_4_;
          y_13[2] = (float)in_stack_fffffffffffffe7c._4_4_;
          y_13[3] = (float)in_stack_fffffffffffffe7c._8_4_;
          y_13[0] = (float)in_stack_fffffffffffffe78;
          y_13[4] = (float)(int)uVar1600;
          y_13[5] = (float)(int)((ulong)uVar1600 >> 0x20);
          y_13[6] = (float)(int)uVar1602;
          y_13[7] = (float)(int)((ulong)uVar1602 >> 0x20);
          y_13[8] = (float)auVar287._0_4_;
          y_13[9] = (float)auVar287._4_4_;
          y_13[10] = (float)auVar287._8_4_;
          y_13[0xb] = (float)auVar287._12_4_;
          y_13[0xc] = (float)auVar350._0_4_;
          y_13[0xd] = (float)auVar350._4_4_;
          y_13[0xe] = (float)auVar350._8_4_;
          y_13[0xf] = (float)auVar350._12_4_;
          x_13[4] = (float)(int)pfVar1599;
          x_13[0] = (float)auVar351._0_4_;
          x_13[1] = (float)auVar351._4_4_;
          x_13[2] = (float)auVar351._8_4_;
          x_13[3] = (float)auVar351._12_4_;
          x_13[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
          x_13[6] = (float)(int)in_stack_fffffffffffffed0;
          x_13[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
          x_13[8] = (float)(int)in_stack_fffffffffffffed8;
          x_13[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
          x_13[10] = (float)(int)in_stack_fffffffffffffee0;
          x_13[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
          x_13[0xc] = (float)(int)in_stack_fffffffffffffee8;
          x_13[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          x_13[0xe] = (float)(int)in_stack_fffffffffffffef0;
          x_13[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
          atan2512_ps(__return_storage_ptr__,y_13,x_13);
          auVar1594 = vmovdqu64_avx512f(auVar1594);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar277 = iVar277 + 2;
        }
        auVar417._8_4_ = 0x40490fdb;
        auVar417._0_8_ = 0x40490fdb40490fdb;
        auVar417._12_4_ = 0x40490fdb;
        auVar417._16_4_ = 0x40490fdb;
        auVar417._20_4_ = 0x40490fdb;
        auVar417._24_4_ = 0x40490fdb;
        auVar417._28_4_ = 0x40490fdb;
        auVar1006._8_4_ = 0x80000000;
        auVar1006._0_8_ = 0x8000000080000000;
        auVar1006._12_4_ = 0x80000000;
        auVar1006._16_4_ = 0x80000000;
        auVar1006._20_4_ = 0x80000000;
        auVar1006._24_4_ = 0x80000000;
        auVar1006._28_4_ = 0x80000000;
        auVar1594._8_8_ = uVar1602;
        auVar1594._0_8_ = uVar1600;
        auVar1594._16_16_ = auVar287;
        auVar1594._32_16_ = auVar350;
        auVar1594._48_16_ = auVar351;
        auVar1594 = vmovdqu64_avx512f(auVar1594);
        auVar444 = auVar1594._0_32_;
        auVar495 = vpternlogd_avx512vl(auVar1006,auVar444,auVar417,0xea);
        auVar688._8_4_ = 0x3f800000;
        auVar688._0_8_ = 0x3f8000003f800000;
        auVar688._12_4_ = 0x3f800000;
        auVar688._16_4_ = 0x3f800000;
        auVar688._20_4_ = 0x3f800000;
        auVar688._24_4_ = 0x3f800000;
        auVar688._28_4_ = 0x3f800000;
        auVar411 = vdivps_avx(auVar688,auVar444);
        auVar350 = ZEXT816(0) << 0x40;
        uVar669 = vcmpps_avx512vl(ZEXT1632(auVar350),auVar495,2);
        uVar279 = vcmpps_avx512vl(auVar444,ZEXT1632(auVar350),1);
        auVar1007._8_4_ = 0x80000000;
        auVar1007._0_8_ = 0x8000000080000000;
        auVar1007._12_4_ = 0x80000000;
        auVar1007._16_4_ = 0x80000000;
        auVar1007._20_4_ = 0x80000000;
        auVar1007._24_4_ = 0x80000000;
        auVar1007._28_4_ = 0x80000000;
        auVar1064._8_4_ = 0x40490fdb;
        auVar1064._0_8_ = 0x40490fdb40490fdb;
        auVar1064._12_4_ = 0x40490fdb;
        auVar1064._16_4_ = 0x40490fdb;
        auVar1064._20_4_ = 0x40490fdb;
        auVar1064._24_4_ = 0x40490fdb;
        auVar1064._28_4_ = 0x40490fdb;
        auVar1117._8_4_ = 0x7fffffff;
        auVar1117._0_8_ = 0x7fffffff7fffffff;
        auVar1117._12_4_ = 0x7fffffff;
        auVar1117._16_4_ = 0x7fffffff;
        auVar1117._20_4_ = 0x7fffffff;
        auVar1117._24_4_ = 0x7fffffff;
        auVar1117._28_4_ = 0x7fffffff;
        auVar1164._8_4_ = 0xbc83a25c;
        auVar1164._0_8_ = 0xbc83a25cbc83a25c;
        auVar1164._12_4_ = 0xbc83a25c;
        auVar1164._16_4_ = 0xbc83a25c;
        auVar1164._20_4_ = 0xbc83a25c;
        auVar1164._24_4_ = 0xbc83a25c;
        auVar1164._28_4_ = 0xbc83a25c;
        auVar1215._8_4_ = 0xbd99b01e;
        auVar1215._0_8_ = 0xbd99b01ebd99b01e;
        auVar1215._12_4_ = 0xbd99b01e;
        auVar1215._16_4_ = 0xbd99b01e;
        auVar1215._20_4_ = 0xbd99b01e;
        auVar1215._24_4_ = 0xbd99b01e;
        auVar1215._28_4_ = 0xbd99b01e;
        auVar1265._8_4_ = 0xbe117200;
        auVar1265._0_8_ = 0xbe117200be117200;
        auVar1265._12_4_ = 0xbe117200;
        auVar1265._16_4_ = 0xbe117200;
        auVar1265._20_4_ = 0xbe117200;
        auVar1265._24_4_ = 0xbe117200;
        auVar1265._28_4_ = 0xbe117200;
        auVar1315._8_4_ = 0xbeaaaa53;
        auVar1315._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1315._12_4_ = 0xbeaaaa53;
        auVar1315._16_4_ = 0xbeaaaa53;
        auVar1315._20_4_ = 0xbeaaaa53;
        auVar1315._24_4_ = 0xbeaaaa53;
        auVar1315._28_4_ = 0xbeaaaa53;
        auVar1369._8_4_ = 0x3b3ac537;
        auVar1369._0_8_ = 0x3b3ac5373b3ac537;
        auVar1369._12_4_ = 0x3b3ac537;
        auVar1369._16_4_ = 0x3b3ac537;
        auVar1369._20_4_ = 0x3b3ac537;
        auVar1369._24_4_ = 0x3b3ac537;
        auVar1369._28_4_ = 0x3b3ac537;
        auVar1423._8_4_ = 0x3d2edd4e;
        auVar1423._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1423._12_4_ = 0x3d2edd4e;
        auVar1423._16_4_ = 0x3d2edd4e;
        auVar1423._20_4_ = 0x3d2edd4e;
        auVar1423._24_4_ = 0x3d2edd4e;
        auVar1423._28_4_ = 0x3d2edd4e;
        auVar1477._8_4_ = 0x3dd9ed24;
        auVar1477._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1477._12_4_ = 0x3dd9ed24;
        auVar1477._16_4_ = 0x3dd9ed24;
        auVar1477._20_4_ = 0x3dd9ed24;
        auVar1477._24_4_ = 0x3dd9ed24;
        auVar1477._28_4_ = 0x3dd9ed24;
        auVar1530._8_4_ = 0x3e4cb974;
        auVar1530._0_8_ = 0x3e4cb9743e4cb974;
        auVar1530._12_4_ = 0x3e4cb974;
        auVar1530._16_4_ = 0x3e4cb974;
        auVar1530._20_4_ = 0x3e4cb974;
        auVar1530._24_4_ = 0x3e4cb974;
        auVar1530._28_4_ = 0x3e4cb974;
        auVar1583._8_4_ = 0x3fc90fdb;
        auVar1583._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1583._12_4_ = 0x3fc90fdb;
        auVar1583._16_4_ = 0x3fc90fdb;
        auVar1583._20_4_ = 0x3fc90fdb;
        auVar1583._24_4_ = 0x3fc90fdb;
        auVar1583._28_4_ = 0x3fc90fdb;
        auVar495 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          auVar444 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar498 = ZEXT1632(auVar350);
          uVar283 = vcmpps_avx512vl(auVar444,auVar498,4);
          uVar282 = vcmpps_avx512vl(auVar444,auVar498,1);
          auVar106._8_4_ = 0xc0490fdb;
          auVar106._0_8_ = 0xc0490fdbc0490fdb;
          auVar106._12_4_ = 0xc0490fdb;
          auVar106._16_4_ = 0xc0490fdb;
          auVar106._20_4_ = 0xc0490fdb;
          auVar106._24_4_ = 0xc0490fdb;
          auVar106._28_4_ = 0xc0490fdb;
          auVar558 = vblendmps_avx512vl(auVar1064,auVar106);
          bVar281 = (bool)((byte)uVar282 & 1);
          auVar518._0_4_ = (uint)bVar281 * auVar558._0_4_ | (uint)!bVar281 * in_ZMM18._0_4_;
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar518._4_4_ = (uint)bVar281 * auVar558._4_4_ | (uint)!bVar281 * in_ZMM18._4_4_;
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar518._8_4_ = (uint)bVar281 * auVar558._8_4_ | (uint)!bVar281 * in_ZMM18._8_4_;
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar518._12_4_ = (uint)bVar281 * auVar558._12_4_ | (uint)!bVar281 * in_ZMM18._12_4_;
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar518._16_4_ = (uint)bVar281 * auVar558._16_4_ | (uint)!bVar281 * in_ZMM18._16_4_;
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar518._20_4_ = (uint)bVar281 * auVar558._20_4_ | (uint)!bVar281 * in_ZMM18._20_4_;
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar518._24_4_ = (uint)bVar281 * auVar558._24_4_ | (uint)!bVar281 * in_ZMM18._24_4_;
          bVar281 = SUB81(uVar282 >> 7,0);
          auVar518._28_4_ = (uint)bVar281 * auVar558._28_4_ | (uint)!bVar281 * in_ZMM18._28_4_;
          auVar244._8_8_ = uVar1602;
          auVar244._0_8_ = uVar1600;
          auVar244._16_16_ = auVar287;
          uVar282 = vcmpps_avx512vl(auVar498,auVar244,4);
          uVar282 = uVar283 & uVar282;
          vandps_avx512vl(auVar444,auVar1007);
          auVar444 = vmulps_avx512vl(auVar444,auVar411);
          vandps_avx512vl(auVar444,auVar1117);
          uVar284 = vcmpps_avx512vl(auVar688,auVar444,1);
          auVar107._8_4_ = 0xbf800000;
          auVar107._0_8_ = 0xbf800000bf800000;
          auVar107._12_4_ = 0xbf800000;
          auVar107._16_4_ = 0xbf800000;
          auVar107._20_4_ = 0xbf800000;
          auVar107._24_4_ = 0xbf800000;
          auVar107._28_4_ = 0xbf800000;
          auVar558 = vblendmps_avx512vl(auVar444,auVar107);
          bVar11 = (byte)uVar284;
          auVar519._0_4_ =
               (uint)(bVar11 & 1) * auVar558._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar519._4_4_ = (uint)bVar281 * auVar558._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar519._8_4_ = (uint)bVar281 * auVar558._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar519._12_4_ = (uint)bVar281 * auVar558._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar519._16_4_ = (uint)bVar281 * auVar558._16_4_ | (uint)!bVar281 * in_ZMM21._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar519._20_4_ = (uint)bVar281 * auVar558._20_4_ | (uint)!bVar281 * in_ZMM21._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar519._24_4_ = (uint)bVar281 * auVar558._24_4_ | (uint)!bVar281 * in_ZMM21._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar519._28_4_ = (uint)bVar281 * auVar558._28_4_ | (uint)!bVar281 * in_ZMM21._28_4_;
          auVar558 = vdivps_avx512vl(auVar519,auVar444);
          auVar520._0_4_ =
               (uint)(bVar11 & 1) * auVar558._0_4_ | !(bool)(bVar11 & 1) * auVar519._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar520._4_4_ = (uint)bVar281 * auVar558._4_4_ | !bVar281 * auVar519._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar520._8_4_ = (uint)bVar281 * auVar558._8_4_ | !bVar281 * auVar519._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar520._12_4_ = (uint)bVar281 * auVar558._12_4_ | !bVar281 * auVar519._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar520._16_4_ = (uint)bVar281 * auVar558._16_4_ | !bVar281 * auVar519._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar520._20_4_ = (uint)bVar281 * auVar558._20_4_ | !bVar281 * auVar519._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar520._24_4_ = (uint)bVar281 * auVar558._24_4_ | !bVar281 * auVar519._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar520._28_4_ = (uint)bVar281 * auVar558._28_4_ | !bVar281 * auVar519._28_4_;
          in_ZMM21 = ZEXT3264(auVar520);
          auVar558 = vmulps_avx512vl(auVar520,auVar520);
          auVar498 = vmulps_avx512vl(auVar558,auVar558);
          auVar499 = vfmadd213ps_avx512vl(auVar1164,auVar498,auVar1215);
          auVar499 = vfmadd213ps_avx512vl(auVar499,auVar498,auVar1265);
          auVar499 = vfmadd213ps_avx512vl(auVar499,auVar498,auVar1315);
          auVar502 = vfmadd213ps_avx512vl(auVar1369,auVar498,auVar1423);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1477);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1530);
          auVar498 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar688);
          auVar558 = vfmadd231ps_avx512vl(auVar498,auVar558,auVar499);
          auVar558 = vmulps_avx512vl(auVar558,auVar520);
          auVar498 = vaddps_avx512vl(auVar558,auVar1583);
          auVar521._0_4_ =
               (uint)(bVar11 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar558._0_4_;
          bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
          auVar521._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * auVar558._4_4_;
          bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
          auVar521._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * auVar558._8_4_;
          bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
          auVar521._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * auVar558._12_4_;
          bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
          auVar521._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * auVar558._16_4_;
          bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
          auVar521._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * auVar558._20_4_;
          bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
          auVar521._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * auVar558._24_4_;
          bVar281 = SUB81(uVar284 >> 7,0);
          auVar521._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * auVar558._28_4_;
          auVar444 = vpternlogd_avx512vl(auVar521,auVar444,auVar1007,0xf8);
          auVar558 = vaddps_avx512vl(auVar444,auVar518);
          bVar281 = (bool)((byte)uVar279 & 1);
          bVar13 = (bool)((byte)(uVar279 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar279 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar279 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar279 >> 4) & 1);
          bVar21 = (bool)((byte)(uVar279 >> 5) & 1);
          bVar23 = (bool)((byte)(uVar279 >> 6) & 1);
          bVar25 = SUB81(uVar279 >> 7,0);
          auVar498 = vorps_avx512vl(auVar518,auVar495);
          auVar522._4_4_ = (uint)((byte)(uVar283 >> 1) & 1) * auVar498._4_4_;
          auVar522._0_4_ = (uint)((byte)uVar283 & 1) * auVar498._0_4_;
          auVar522._8_4_ = (uint)((byte)(uVar283 >> 2) & 1) * auVar498._8_4_;
          auVar522._12_4_ = (uint)((byte)(uVar283 >> 3) & 1) * auVar498._12_4_;
          auVar522._16_4_ = (uint)((byte)(uVar283 >> 4) & 1) * auVar498._16_4_;
          auVar522._20_4_ = (uint)((byte)(uVar283 >> 5) & 1) * auVar498._20_4_;
          auVar522._24_4_ = (uint)((byte)(uVar283 >> 6) & 1) * auVar498._24_4_;
          auVar522._28_4_ = (uint)(byte)(uVar283 >> 7) * auVar498._28_4_;
          bVar11 = (byte)uVar283 | (byte)uVar669;
          auVar498 = vorps_avx512vl(auVar522,auVar417);
          auVar499 = vmovdqa32_avx512vl(auVar522);
          bVar14 = (bool)(bVar11 >> 1 & 1);
          bVar16 = (bool)(bVar11 >> 2 & 1);
          bVar18 = (bool)(bVar11 >> 3 & 1);
          bVar20 = (bool)(bVar11 >> 4 & 1);
          bVar22 = (bool)(bVar11 >> 5 & 1);
          bVar24 = (bool)(bVar11 >> 6 & 1);
          bVar12 = (bool)((byte)uVar282 & 1);
          auVar523._0_4_ =
               (uint)bVar12 * ((uint)bVar281 * auVar558._0_4_ | (uint)!bVar281 * auVar444._0_4_) |
               (uint)!bVar12 *
               ((uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar498._0_4_);
          bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
          auVar523._4_4_ =
               (uint)bVar281 * ((uint)bVar13 * auVar558._4_4_ | (uint)!bVar13 * auVar444._4_4_) |
               (uint)!bVar281 * ((uint)bVar14 * auVar499._4_4_ | (uint)!bVar14 * auVar498._4_4_);
          bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
          auVar523._8_4_ =
               (uint)bVar281 * ((uint)bVar15 * auVar558._8_4_ | (uint)!bVar15 * auVar444._8_4_) |
               (uint)!bVar281 * ((uint)bVar16 * auVar499._8_4_ | (uint)!bVar16 * auVar498._8_4_);
          bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
          auVar523._12_4_ =
               (uint)bVar281 * ((uint)bVar17 * auVar558._12_4_ | (uint)!bVar17 * auVar444._12_4_) |
               (uint)!bVar281 * ((uint)bVar18 * auVar499._12_4_ | (uint)!bVar18 * auVar498._12_4_);
          bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
          auVar523._16_4_ =
               (uint)bVar281 * ((uint)bVar19 * auVar558._16_4_ | (uint)!bVar19 * auVar444._16_4_) |
               (uint)!bVar281 * ((uint)bVar20 * auVar499._16_4_ | (uint)!bVar20 * auVar498._16_4_);
          bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
          auVar523._20_4_ =
               (uint)bVar281 * ((uint)bVar21 * auVar558._20_4_ | (uint)!bVar21 * auVar444._20_4_) |
               (uint)!bVar281 * ((uint)bVar22 * auVar499._20_4_ | (uint)!bVar22 * auVar498._20_4_);
          bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
          auVar523._24_4_ =
               (uint)bVar281 * ((uint)bVar23 * auVar558._24_4_ | (uint)!bVar23 * auVar444._24_4_) |
               (uint)!bVar281 * ((uint)bVar24 * auVar499._24_4_ | (uint)!bVar24 * auVar498._24_4_);
          bVar281 = SUB81(uVar282 >> 7,0);
          auVar523._28_4_ =
               (uint)bVar281 * ((uint)bVar25 * auVar558._28_4_ | (uint)!bVar25 * auVar444._28_4_) |
               (uint)!bVar281 *
               ((uint)(bVar11 >> 7) * auVar499._28_4_ | (uint)!(bool)(bVar11 >> 7) * auVar498._28_4_
               );
          in_ZMM18 = ZEXT3264(auVar523);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar523;
          ptr1 = ptr1 + 1;
          outptr = (float *)(*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      if (iVar276 != 4) {
        return;
      }
      auVar1595 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar1594 = vmovdqu64_avx512f(auVar1595);
      uVar1600 = auVar1594._0_8_;
      uVar1602 = auVar1594._8_8_;
      auVar351 = auVar1594._16_16_;
      auVar354 = auVar1594._32_16_;
      auVar355 = auVar1594._48_16_;
      auVar287 = auVar1595._0_16_;
      auVar350 = ZEXT116(0) * auVar287 + ZEXT116(1) * auVar287;
      auVar287 = ZEXT116(0) * auVar1595._16_16_ + ZEXT116(1) * auVar287;
      uVar1603 = auVar350._0_4_;
      uVar1596 = auVar350._4_4_;
      uVar669 = auVar350._8_8_;
      uVar279 = 0;
      while( true ) {
        uVar728 = auVar287._8_8_;
        uVar726 = auVar287._0_8_;
        if (iVar278 <= (int)uVar279 + 3) break;
        fVar666 = ptr1[uVar279 + 3];
        auVar684._4_4_ = fVar666;
        auVar684._0_4_ = fVar666;
        auVar684._8_4_ = fVar666;
        auVar684._12_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 2];
        auVar763._4_4_ = fVar666;
        auVar763._0_4_ = fVar666;
        auVar763._8_4_ = fVar666;
        auVar763._12_4_ = fVar666;
        auVar714._0_16_ = ZEXT116(0) * auVar684 + ZEXT116(1) * auVar763;
        auVar714._16_16_ = ZEXT116(1) * auVar684;
        fVar666 = ptr1[uVar279 + 1];
        auVar764._4_4_ = fVar666;
        auVar764._0_4_ = fVar666;
        auVar764._8_4_ = fVar666;
        auVar764._12_4_ = fVar666;
        fVar666 = ptr1[uVar279];
        auVar835._4_4_ = fVar666;
        auVar835._0_4_ = fVar666;
        auVar835._8_4_ = fVar666;
        auVar835._12_4_ = fVar666;
        auVar1594 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar764,
                                                   ZEXT116(0) * auVar764 + ZEXT116(1) * auVar835)),
                               auVar714,1);
        y_14[1] = (float)in_stack_fffffffffffffe7c._0_4_;
        y_14[2] = (float)in_stack_fffffffffffffe7c._4_4_;
        y_14[3] = (float)in_stack_fffffffffffffe7c._8_4_;
        y_14[0] = (float)in_stack_fffffffffffffe78;
        y_14[4] = (float)(int)uVar1600;
        y_14[5] = (float)(int)((ulong)uVar1600 >> 0x20);
        y_14[6] = (float)(int)uVar1602;
        y_14[7] = (float)(int)((ulong)uVar1602 >> 0x20);
        y_14[8] = (float)auVar351._0_4_;
        y_14[9] = (float)auVar351._4_4_;
        y_14[10] = (float)auVar351._8_4_;
        y_14[0xb] = (float)auVar351._12_4_;
        y_14[0xc] = (float)auVar354._0_4_;
        y_14[0xd] = (float)auVar354._4_4_;
        y_14[0xe] = (float)auVar354._8_4_;
        y_14[0xf] = (float)auVar354._12_4_;
        x_14[4] = (float)uVar1603;
        x_14[0] = (float)auVar355._0_4_;
        x_14[1] = (float)auVar355._4_4_;
        x_14[2] = (float)auVar355._8_4_;
        x_14[3] = (float)auVar355._12_4_;
        x_14[5] = (float)uVar1596;
        x_14[6] = (float)(int)uVar669;
        x_14[7] = (float)(int)((ulong)uVar669 >> 0x20);
        x_14[8] = (float)(int)uVar726;
        x_14[9] = (float)(int)((ulong)uVar726 >> 0x20);
        x_14[10] = (float)(int)uVar728;
        x_14[0xb] = (float)(int)((ulong)uVar728 >> 0x20);
        x_14[0xc] = (float)(int)in_stack_fffffffffffffee8;
        x_14[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
        x_14[0xe] = (float)(int)in_stack_fffffffffffffef0;
        x_14[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
        atan2512_ps(__return_storage_ptr__,y_14,x_14);
        auVar1594 = vmovdqu64_avx512f(auVar1594);
        *(undefined1 (*) [64])outptr = auVar1594;
        outptr = (float *)((long)outptr + 0x40);
        uVar279 = uVar279 + 4;
      }
      auVar715._8_4_ = 0x40490fdb;
      auVar715._0_8_ = 0x40490fdb40490fdb;
      auVar715._12_4_ = 0x40490fdb;
      auVar715._16_4_ = 0x40490fdb;
      auVar715._20_4_ = 0x40490fdb;
      auVar715._24_4_ = 0x40490fdb;
      auVar715._28_4_ = 0x40490fdb;
      auVar1008._8_4_ = 0x80000000;
      auVar1008._0_8_ = 0x8000000080000000;
      auVar1008._12_4_ = 0x80000000;
      auVar1008._16_4_ = 0x80000000;
      auVar1008._20_4_ = 0x80000000;
      auVar1008._24_4_ = 0x80000000;
      auVar1008._28_4_ = 0x80000000;
      auVar250._4_4_ = uVar1596;
      auVar250._0_4_ = uVar1603;
      auVar250._8_8_ = uVar669;
      auVar250._16_8_ = uVar726;
      auVar250._24_8_ = uVar728;
      auVar495 = vpternlogd_avx512vl(auVar1008,auVar250,auVar715,0xea);
      auVar804._8_4_ = 0x3f800000;
      auVar804._0_8_ = 0x3f8000003f800000;
      auVar804._12_4_ = 0x3f800000;
      auVar804._16_4_ = 0x3f800000;
      auVar804._20_4_ = 0x3f800000;
      auVar804._24_4_ = 0x3f800000;
      auVar804._28_4_ = 0x3f800000;
      auVar411 = vdivps_avx(auVar804,auVar250);
      auVar287 = ZEXT816(0) << 0x40;
      uVar668 = vcmpps_avx512vl(ZEXT1632(auVar287),auVar495,2);
      uVar283 = vcmpps_avx512vl(auVar250,ZEXT1632(auVar287),1);
      auVar1009._8_4_ = 0x80000000;
      auVar1009._0_8_ = 0x8000000080000000;
      auVar1009._12_4_ = 0x80000000;
      auVar1009._16_4_ = 0x80000000;
      auVar1009._20_4_ = 0x80000000;
      auVar1009._24_4_ = 0x80000000;
      auVar1009._28_4_ = 0x80000000;
      auVar1065._8_4_ = 0x40490fdb;
      auVar1065._0_8_ = 0x40490fdb40490fdb;
      auVar1065._12_4_ = 0x40490fdb;
      auVar1065._16_4_ = 0x40490fdb;
      auVar1065._20_4_ = 0x40490fdb;
      auVar1065._24_4_ = 0x40490fdb;
      auVar1065._28_4_ = 0x40490fdb;
      auVar1118._8_4_ = 0x7fffffff;
      auVar1118._0_8_ = 0x7fffffff7fffffff;
      auVar1118._12_4_ = 0x7fffffff;
      auVar1118._16_4_ = 0x7fffffff;
      auVar1118._20_4_ = 0x7fffffff;
      auVar1118._24_4_ = 0x7fffffff;
      auVar1118._28_4_ = 0x7fffffff;
      auVar1165._8_4_ = 0xbc83a25c;
      auVar1165._0_8_ = 0xbc83a25cbc83a25c;
      auVar1165._12_4_ = 0xbc83a25c;
      auVar1165._16_4_ = 0xbc83a25c;
      auVar1165._20_4_ = 0xbc83a25c;
      auVar1165._24_4_ = 0xbc83a25c;
      auVar1165._28_4_ = 0xbc83a25c;
      auVar1216._8_4_ = 0xbd99b01e;
      auVar1216._0_8_ = 0xbd99b01ebd99b01e;
      auVar1216._12_4_ = 0xbd99b01e;
      auVar1216._16_4_ = 0xbd99b01e;
      auVar1216._20_4_ = 0xbd99b01e;
      auVar1216._24_4_ = 0xbd99b01e;
      auVar1216._28_4_ = 0xbd99b01e;
      auVar1266._8_4_ = 0xbe117200;
      auVar1266._0_8_ = 0xbe117200be117200;
      auVar1266._12_4_ = 0xbe117200;
      auVar1266._16_4_ = 0xbe117200;
      auVar1266._20_4_ = 0xbe117200;
      auVar1266._24_4_ = 0xbe117200;
      auVar1266._28_4_ = 0xbe117200;
      auVar1316._8_4_ = 0xbeaaaa53;
      auVar1316._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1316._12_4_ = 0xbeaaaa53;
      auVar1316._16_4_ = 0xbeaaaa53;
      auVar1316._20_4_ = 0xbeaaaa53;
      auVar1316._24_4_ = 0xbeaaaa53;
      auVar1316._28_4_ = 0xbeaaaa53;
      auVar1370._8_4_ = 0x3b3ac537;
      auVar1370._0_8_ = 0x3b3ac5373b3ac537;
      auVar1370._12_4_ = 0x3b3ac537;
      auVar1370._16_4_ = 0x3b3ac537;
      auVar1370._20_4_ = 0x3b3ac537;
      auVar1370._24_4_ = 0x3b3ac537;
      auVar1370._28_4_ = 0x3b3ac537;
      auVar1424._8_4_ = 0x3d2edd4e;
      auVar1424._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1424._12_4_ = 0x3d2edd4e;
      auVar1424._16_4_ = 0x3d2edd4e;
      auVar1424._20_4_ = 0x3d2edd4e;
      auVar1424._24_4_ = 0x3d2edd4e;
      auVar1424._28_4_ = 0x3d2edd4e;
      auVar1478._8_4_ = 0x3dd9ed24;
      auVar1478._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1478._12_4_ = 0x3dd9ed24;
      auVar1478._16_4_ = 0x3dd9ed24;
      auVar1478._20_4_ = 0x3dd9ed24;
      auVar1478._24_4_ = 0x3dd9ed24;
      auVar1478._28_4_ = 0x3dd9ed24;
      auVar1531._8_4_ = 0x3e4cb974;
      auVar1531._0_8_ = 0x3e4cb9743e4cb974;
      auVar1531._12_4_ = 0x3e4cb974;
      auVar1531._16_4_ = 0x3e4cb974;
      auVar1531._20_4_ = 0x3e4cb974;
      auVar1531._24_4_ = 0x3e4cb974;
      auVar1531._28_4_ = 0x3e4cb974;
      auVar1584._8_4_ = 0x3fc90fdb;
      auVar1584._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1584._12_4_ = 0x3fc90fdb;
      auVar1584._16_4_ = 0x3fc90fdb;
      auVar1584._20_4_ = 0x3fc90fdb;
      auVar1584._24_4_ = 0x3fc90fdb;
      auVar1584._28_4_ = 0x3fc90fdb;
      auVar495 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
        auVar350 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279 + 1]));
        auVar356 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[uVar279]));
        auVar444 = vinsertf32x4_avx512vl(ZEXT1632(auVar356),auVar350,1);
        auVar498 = ZEXT1632(auVar287);
        uVar282 = vcmpps_avx512vl(auVar444,auVar498,1);
        auVar108._8_4_ = 0xc0490fdb;
        auVar108._0_8_ = 0xc0490fdbc0490fdb;
        auVar108._12_4_ = 0xc0490fdb;
        auVar108._16_4_ = 0xc0490fdb;
        auVar108._20_4_ = 0xc0490fdb;
        auVar108._24_4_ = 0xc0490fdb;
        auVar108._28_4_ = 0xc0490fdb;
        auVar558 = vblendmps_avx512vl(auVar1065,auVar108);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar524._0_4_ = (uint)bVar281 * auVar558._0_4_ | (uint)!bVar281 * auVar356._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar524._4_4_ = (uint)bVar281 * auVar558._4_4_ | (uint)!bVar281 * auVar356._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar524._8_4_ = (uint)bVar281 * auVar558._8_4_ | (uint)!bVar281 * auVar356._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar524._12_4_ = (uint)bVar281 * auVar558._12_4_ | (uint)!bVar281 * auVar356._12_4_;
        auVar524._16_4_ = (uint)((byte)(uVar282 >> 4) & 1) * auVar558._16_4_;
        auVar524._20_4_ = (uint)((byte)(uVar282 >> 5) & 1) * auVar558._20_4_;
        auVar524._24_4_ = (uint)((byte)(uVar282 >> 6) & 1) * auVar558._24_4_;
        auVar524._28_4_ = (uint)(byte)(uVar282 >> 7) * auVar558._28_4_;
        uVar282 = vcmpps_avx512vl(auVar444,auVar498,4);
        auVar251._4_4_ = uVar1596;
        auVar251._0_4_ = uVar1603;
        auVar251._8_8_ = uVar669;
        auVar251._16_8_ = uVar726;
        auVar251._24_8_ = uVar728;
        uVar284 = vcmpps_avx512vl(auVar498,auVar251,4);
        uVar284 = uVar282 & uVar284;
        auVar558 = vmulps_avx512vl(auVar444,auVar411);
        vandps_avx512vl(auVar558,auVar1118);
        uVar285 = vcmpps_avx512vl(auVar804,auVar558,1);
        auVar109._8_4_ = 0xbf800000;
        auVar109._0_8_ = 0xbf800000bf800000;
        auVar109._12_4_ = 0xbf800000;
        auVar109._16_4_ = 0xbf800000;
        auVar109._20_4_ = 0xbf800000;
        auVar109._24_4_ = 0xbf800000;
        auVar109._28_4_ = 0xbf800000;
        auVar498 = vblendmps_avx512vl(auVar558,auVar109);
        bVar11 = (byte)uVar285;
        auVar525._0_4_ =
             (uint)(bVar11 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar525._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar525._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar525._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
        bVar281 = (bool)((byte)(uVar285 >> 4) & 1);
        auVar525._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * in_ZMM21._16_4_;
        bVar281 = (bool)((byte)(uVar285 >> 5) & 1);
        auVar525._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * in_ZMM21._20_4_;
        bVar281 = (bool)((byte)(uVar285 >> 6) & 1);
        auVar525._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * in_ZMM21._24_4_;
        bVar281 = SUB81(uVar285 >> 7,0);
        auVar525._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * in_ZMM21._28_4_;
        vandps_avx512vl(auVar444,auVar1009);
        auVar444 = vdivps_avx512vl(auVar525,auVar558);
        auVar526._0_4_ = (uint)(bVar11 & 1) * auVar444._0_4_ | !(bool)(bVar11 & 1) * auVar525._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar526._4_4_ = (uint)bVar281 * auVar444._4_4_ | !bVar281 * auVar525._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar526._8_4_ = (uint)bVar281 * auVar444._8_4_ | !bVar281 * auVar525._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar526._12_4_ = (uint)bVar281 * auVar444._12_4_ | !bVar281 * auVar525._12_4_;
        bVar281 = (bool)((byte)(uVar285 >> 4) & 1);
        auVar526._16_4_ = (uint)bVar281 * auVar444._16_4_ | !bVar281 * auVar525._16_4_;
        bVar281 = (bool)((byte)(uVar285 >> 5) & 1);
        auVar526._20_4_ = (uint)bVar281 * auVar444._20_4_ | !bVar281 * auVar525._20_4_;
        bVar281 = (bool)((byte)(uVar285 >> 6) & 1);
        auVar526._24_4_ = (uint)bVar281 * auVar444._24_4_ | !bVar281 * auVar525._24_4_;
        bVar281 = SUB81(uVar285 >> 7,0);
        auVar526._28_4_ = (uint)bVar281 * auVar444._28_4_ | !bVar281 * auVar525._28_4_;
        in_ZMM21 = ZEXT3264(auVar526);
        auVar444 = vmulps_avx512vl(auVar526,auVar526);
        auVar498 = vmulps_avx512vl(auVar444,auVar444);
        auVar499 = vfmadd213ps_avx512vl(auVar1165,auVar498,auVar1216);
        auVar499 = vfmadd213ps_avx512vl(auVar499,auVar498,auVar1266);
        auVar499 = vfmadd213ps_avx512vl(auVar499,auVar498,auVar1316);
        auVar502 = vfmadd213ps_avx512vl(auVar1370,auVar498,auVar1424);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1478);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1531);
        auVar498 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar804);
        auVar444 = vfmadd231ps_avx512vl(auVar498,auVar444,auVar499);
        auVar444 = vmulps_avx512vl(auVar444,auVar526);
        auVar498 = vaddps_avx512vl(auVar444,auVar1584);
        auVar527._0_4_ =
             (uint)(bVar11 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar444._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar527._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * auVar444._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar527._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * auVar444._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar527._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * auVar444._12_4_;
        bVar281 = (bool)((byte)(uVar285 >> 4) & 1);
        auVar527._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * auVar444._16_4_;
        bVar281 = (bool)((byte)(uVar285 >> 5) & 1);
        auVar527._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * auVar444._20_4_;
        bVar281 = (bool)((byte)(uVar285 >> 6) & 1);
        auVar527._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * auVar444._24_4_;
        bVar281 = SUB81(uVar285 >> 7,0);
        auVar527._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * auVar444._28_4_;
        auVar444 = vpternlogd_avx512vl(auVar527,auVar558,auVar1009,0xf8);
        auVar558 = vaddps_avx512vl(auVar444,auVar524);
        bVar281 = (bool)((byte)uVar283 & 1);
        bVar13 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar283 >> 3) & 1);
        bVar19 = (bool)((byte)(uVar283 >> 4) & 1);
        bVar21 = (bool)((byte)(uVar283 >> 5) & 1);
        bVar23 = (bool)((byte)(uVar283 >> 6) & 1);
        bVar25 = SUB81(uVar283 >> 7,0);
        auVar498 = vorps_avx512vl(auVar525,auVar495);
        auVar528._4_4_ = (uint)((byte)(uVar282 >> 1) & 1) * auVar498._4_4_;
        auVar528._0_4_ = (uint)((byte)uVar282 & 1) * auVar498._0_4_;
        auVar528._8_4_ = (uint)((byte)(uVar282 >> 2) & 1) * auVar498._8_4_;
        auVar528._12_4_ = (uint)((byte)(uVar282 >> 3) & 1) * auVar498._12_4_;
        auVar528._16_4_ = (uint)((byte)(uVar282 >> 4) & 1) * auVar498._16_4_;
        auVar528._20_4_ = (uint)((byte)(uVar282 >> 5) & 1) * auVar498._20_4_;
        auVar528._24_4_ = (uint)((byte)(uVar282 >> 6) & 1) * auVar498._24_4_;
        auVar528._28_4_ = (uint)(byte)(uVar282 >> 7) * auVar498._28_4_;
        bVar11 = (byte)uVar282 | (byte)uVar668;
        auVar498 = vorps_avx512vl(auVar528,auVar715);
        auVar499 = vmovdqa32_avx512vl(auVar528);
        bVar14 = (bool)(bVar11 >> 1 & 1);
        bVar16 = (bool)(bVar11 >> 2 & 1);
        bVar18 = (bool)(bVar11 >> 3 & 1);
        bVar20 = (bool)(bVar11 >> 4 & 1);
        bVar22 = (bool)(bVar11 >> 5 & 1);
        bVar24 = (bool)(bVar11 >> 6 & 1);
        bVar12 = (bool)((byte)uVar284 & 1);
        auVar529._0_4_ =
             (uint)bVar12 * ((uint)bVar281 * auVar558._0_4_ | (uint)!bVar281 * auVar444._0_4_) |
             (uint)!bVar12 *
             ((uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar498._0_4_);
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar529._4_4_ =
             (uint)bVar281 * ((uint)bVar13 * auVar558._4_4_ | (uint)!bVar13 * auVar444._4_4_) |
             (uint)!bVar281 * ((uint)bVar14 * auVar499._4_4_ | (uint)!bVar14 * auVar498._4_4_);
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar529._8_4_ =
             (uint)bVar281 * ((uint)bVar15 * auVar558._8_4_ | (uint)!bVar15 * auVar444._8_4_) |
             (uint)!bVar281 * ((uint)bVar16 * auVar499._8_4_ | (uint)!bVar16 * auVar498._8_4_);
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar529._12_4_ =
             (uint)bVar281 * ((uint)bVar17 * auVar558._12_4_ | (uint)!bVar17 * auVar444._12_4_) |
             (uint)!bVar281 * ((uint)bVar18 * auVar499._12_4_ | (uint)!bVar18 * auVar498._12_4_);
        bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
        auVar529._16_4_ =
             (uint)bVar281 * ((uint)bVar19 * auVar558._16_4_ | (uint)!bVar19 * auVar444._16_4_) |
             (uint)!bVar281 * ((uint)bVar20 * auVar499._16_4_ | (uint)!bVar20 * auVar498._16_4_);
        bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
        auVar529._20_4_ =
             (uint)bVar281 * ((uint)bVar21 * auVar558._20_4_ | (uint)!bVar21 * auVar444._20_4_) |
             (uint)!bVar281 * ((uint)bVar22 * auVar499._20_4_ | (uint)!bVar22 * auVar498._20_4_);
        bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
        auVar529._24_4_ =
             (uint)bVar281 * ((uint)bVar23 * auVar558._24_4_ | (uint)!bVar23 * auVar444._24_4_) |
             (uint)!bVar281 * ((uint)bVar24 * auVar499._24_4_ | (uint)!bVar24 * auVar498._24_4_);
        bVar281 = SUB81(uVar284 >> 7,0);
        auVar529._28_4_ =
             (uint)bVar281 * ((uint)bVar25 * auVar558._28_4_ | (uint)!bVar25 * auVar444._28_4_) |
             (uint)!bVar281 *
             ((uint)(bVar11 >> 7) * auVar499._28_4_ | (uint)!(bool)(bVar11 >> 7) * auVar498._28_4_);
        in_ZMM18 = ZEXT3264(auVar529);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar529;
        outptr = (float *)(*(undefined1 (*) [64])outptr + 0x20);
      }
      auVar293._8_4_ = 0x40490fdb;
      auVar293._0_8_ = 0x40490fdb40490fdb;
      auVar293._12_4_ = 0x40490fdb;
      auVar287._8_4_ = 0x80000000;
      auVar287._0_8_ = 0x8000000080000000;
      auVar287._12_4_ = 0x80000000;
      auVar1595._8_8_ = uVar1602;
      auVar1595._0_8_ = uVar1600;
      auVar1595._16_16_ = auVar351;
      auVar1595._32_16_ = auVar354;
      auVar1595._48_16_ = auVar355;
      auVar1594 = vmovdqu64_avx512f(auVar1595);
      auVar354 = auVar1594._0_16_;
      auVar287 = vpternlogd_avx512vl(auVar287,auVar354,auVar293,0xea);
      auVar765._8_4_ = 0x3f800000;
      auVar765._0_8_ = 0x3f8000003f800000;
      auVar765._12_4_ = 0x3f800000;
      auVar350 = vdivps_avx512vl(auVar765,auVar354);
      lVar280 = 0;
      auVar351 = ZEXT416(0) << 0x40;
      uVar669 = vcmpps_avx512vl(auVar351,auVar287,2);
      auVar980._8_4_ = 0x80000000;
      auVar980._0_8_ = 0x8000000080000000;
      auVar980._12_4_ = 0x80000000;
      auVar1035._8_4_ = 0x40490fdb;
      auVar1035._0_8_ = 0x40490fdb40490fdb;
      auVar1035._12_4_ = 0x40490fdb;
      auVar1090._8_4_ = 0x7fffffff;
      auVar1090._0_8_ = 0x7fffffff7fffffff;
      auVar1090._12_4_ = 0x7fffffff;
      auVar1143._8_4_ = 0xbc83a25c;
      auVar1143._0_8_ = 0xbc83a25cbc83a25c;
      auVar1143._12_4_ = 0xbc83a25c;
      auVar1190._8_4_ = 0xbd99b01e;
      auVar1190._0_8_ = 0xbd99b01ebd99b01e;
      auVar1190._12_4_ = 0xbd99b01e;
      auVar1240._8_4_ = 0xbe117200;
      auVar1240._0_8_ = 0xbe117200be117200;
      auVar1240._12_4_ = 0xbe117200;
      auVar1288._8_4_ = 0xbeaaaa53;
      auVar1288._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1288._12_4_ = 0xbeaaaa53;
      auVar1342._8_4_ = 0x3b3ac537;
      auVar1342._0_8_ = 0x3b3ac5373b3ac537;
      auVar1342._12_4_ = 0x3b3ac537;
      auVar1396._8_4_ = 0x3d2edd4e;
      auVar1396._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1396._12_4_ = 0x3d2edd4e;
      auVar1450._8_4_ = 0x3dd9ed24;
      auVar1450._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1450._12_4_ = 0x3dd9ed24;
      auVar1503._8_4_ = 0x3e4cb974;
      auVar1503._0_8_ = 0x3e4cb9743e4cb974;
      auVar1503._12_4_ = 0x3e4cb974;
      auVar1556._8_4_ = 0x3fc90fdb;
      auVar1556._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1556._12_4_ = 0x3fc90fdb;
      uVar283 = vcmpps_avx512vl(auVar354,auVar351,1);
      auVar287 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      for (uVar282 = uVar279 & 0xffffffff; (int)uVar282 < iVar278;
          uVar282 = (ulong)((int)uVar282 + 1)) {
        auVar354 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + uVar279 * 4 + lVar280)));
        uVar284 = vcmpps_avx512vl(auVar354,auVar351,4);
        auVar242._8_8_ = uVar1602;
        auVar242._0_8_ = uVar1600;
        uVar285 = vcmpps_avx512vl(auVar351,auVar242,4);
        uVar285 = uVar284 & uVar285;
        uVar33 = vcmpps_avx512vl(auVar354,auVar351,1);
        auVar45._8_4_ = 0xc0490fdb;
        auVar45._0_8_ = 0xc0490fdbc0490fdb;
        auVar45._12_4_ = 0xc0490fdb;
        auVar355 = vblendmps_avx512vl(auVar1035,auVar45);
        bVar281 = (bool)((byte)uVar33 & 1);
        auVar374._0_4_ = (uint)bVar281 * auVar355._0_4_ | (uint)!bVar281 * in_ZMM18._0_4_;
        bVar281 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar374._4_4_ = (uint)bVar281 * auVar355._4_4_ | (uint)!bVar281 * in_ZMM18._4_4_;
        bVar281 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar374._8_4_ = (uint)bVar281 * auVar355._8_4_ | (uint)!bVar281 * in_ZMM18._8_4_;
        bVar281 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar374._12_4_ = (uint)bVar281 * auVar355._12_4_ | (uint)!bVar281 * in_ZMM18._12_4_;
        auVar355 = vandps_avx512vl(auVar354,auVar980);
        auVar354 = vmulps_avx512vl(auVar354,auVar350);
        auVar356 = vandps_avx512vl(auVar354,auVar1090);
        uVar33 = vcmpps_avx512vl(auVar765,auVar356,1);
        auVar46._8_4_ = 0xbf800000;
        auVar46._0_8_ = 0xbf800000bf800000;
        auVar46._12_4_ = 0xbf800000;
        auVar359 = vblendmps_avx512vl(auVar356,auVar46);
        bVar11 = (byte)uVar33;
        auVar375._0_4_ =
             (uint)(bVar11 & 1) * auVar359._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
        bVar281 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar375._4_4_ = (uint)bVar281 * auVar359._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
        bVar281 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar375._8_4_ = (uint)bVar281 * auVar359._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
        bVar281 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar375._12_4_ = (uint)bVar281 * auVar359._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
        auVar356 = vdivps_avx512vl(auVar375,auVar356);
        auVar376._0_4_ = (uint)(bVar11 & 1) * auVar356._0_4_ | !(bool)(bVar11 & 1) * auVar375._0_4_;
        bVar281 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar376._4_4_ = (uint)bVar281 * auVar356._4_4_ | !bVar281 * auVar375._4_4_;
        bVar281 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar376._8_4_ = (uint)bVar281 * auVar356._8_4_ | !bVar281 * auVar375._8_4_;
        bVar281 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar376._12_4_ = (uint)bVar281 * auVar356._12_4_ | !bVar281 * auVar375._12_4_;
        in_ZMM21 = ZEXT1664(auVar376);
        auVar356 = vmulps_avx512vl(auVar376,auVar376);
        auVar359 = vmulps_avx512vl(auVar356,auVar356);
        auVar360 = vfmadd213ps_avx512vl(auVar1143,auVar359,auVar1190);
        auVar360 = vfmadd213ps_avx512vl(auVar360,auVar359,auVar1240);
        auVar360 = vfmadd213ps_avx512vl(auVar360,auVar359,auVar1288);
        auVar395 = vfmadd213ps_avx512vl(auVar1342,auVar359,auVar1396);
        auVar395 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar1450);
        auVar395 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar1503);
        auVar359 = vfmadd213ps_avx512vl(auVar395,auVar359,auVar765);
        auVar356 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar360);
        auVar356 = vmulps_avx512vl(auVar356,auVar376);
        auVar359 = vaddps_avx512vl(auVar356,auVar1556);
        auVar377._0_4_ =
             (uint)(bVar11 & 1) * auVar359._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar356._0_4_;
        bVar281 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar377._4_4_ = (uint)bVar281 * auVar359._4_4_ | (uint)!bVar281 * auVar356._4_4_;
        bVar281 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar377._8_4_ = (uint)bVar281 * auVar359._8_4_ | (uint)!bVar281 * auVar356._8_4_;
        bVar281 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar377._12_4_ = (uint)bVar281 * auVar359._12_4_ | (uint)!bVar281 * auVar356._12_4_;
        auVar354 = vpternlogd_avx512vl(auVar377,auVar354,auVar980,0xf8);
        auVar356 = vaddps_avx512vl(auVar354,auVar374);
        bVar281 = (bool)((byte)uVar283 & 1);
        bVar14 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar355 = vorps_avx512vl(auVar355,auVar287);
        auVar378._4_4_ = (uint)((byte)(uVar284 >> 1) & 1) * auVar355._4_4_;
        auVar378._0_4_ = (uint)((byte)uVar284 & 1) * auVar355._0_4_;
        auVar378._8_4_ = (uint)((byte)(uVar284 >> 2) & 1) * auVar355._8_4_;
        auVar378._12_4_ = (uint)((byte)(uVar284 >> 3) & 1) * auVar355._12_4_;
        uVar34 = (ushort)uVar284 | (ushort)uVar669;
        auVar355 = vorps_avx512vl(auVar378,auVar293);
        auVar359 = vmovdqa32_avx512vl(auVar378);
        bVar12 = (bool)((byte)uVar34 & 1);
        bVar15 = (bool)((byte)(uVar34 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar34 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar34 >> 3) & 1);
        bVar13 = (bool)((byte)uVar285 & 1);
        auVar379._0_4_ =
             (uint)bVar13 * ((uint)bVar281 * auVar356._0_4_ | (uint)!bVar281 * auVar354._0_4_) |
             (uint)!bVar13 * ((uint)bVar12 * auVar359._0_4_ | (uint)!bVar12 * auVar355._0_4_);
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar379._4_4_ =
             (uint)bVar281 * ((uint)bVar14 * auVar356._4_4_ | (uint)!bVar14 * auVar354._4_4_) |
             (uint)!bVar281 * ((uint)bVar15 * auVar359._4_4_ | (uint)!bVar15 * auVar355._4_4_);
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar379._8_4_ =
             (uint)bVar281 * ((uint)bVar16 * auVar356._8_4_ | (uint)!bVar16 * auVar354._8_4_) |
             (uint)!bVar281 * ((uint)bVar17 * auVar359._8_4_ | (uint)!bVar17 * auVar355._8_4_);
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar379._12_4_ =
             (uint)bVar281 * ((uint)bVar18 * auVar356._12_4_ | (uint)!bVar18 * auVar354._12_4_) |
             (uint)!bVar281 * ((uint)bVar19 * auVar359._12_4_ | (uint)!bVar19 * auVar355._12_4_);
        in_ZMM18 = ZEXT1664(auVar379);
        *(undefined1 (*) [16])(*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar379;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw == bw) {
      uVar279 = 0;
      pfVar1599 = ptr1;
      while( true ) {
        if (iVar277 <= (int)uVar279 + 0xf) break;
        vmovdqu64_avx512f(*(undefined1 (*) [64])(ptr + uVar279));
        auVar1594 = *(undefined1 (*) [64])(ptr1 + uVar279);
        y[1] = (float)in_stack_fffffffffffffe7c._0_4_;
        y[2] = (float)in_stack_fffffffffffffe7c._4_4_;
        y[3] = (float)in_stack_fffffffffffffe7c._8_4_;
        y[0] = (float)in_stack_fffffffffffffe78;
        y._16_8_ = outptr;
        y[6] = (float)(int)in_stack_fffffffffffffe90;
        y[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
        y[8] = (float)in_stack_fffffffffffffe98._0_4_;
        y[9] = (float)in_stack_fffffffffffffe98._4_4_;
        y[10] = (float)in_stack_fffffffffffffe98._8_4_;
        y[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
        y[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
        y[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
        y[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
        y[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
        x[4] = (float)(int)pfVar1599;
        x[0] = (float)in_stack_fffffffffffffeb8._0_4_;
        x[1] = (float)in_stack_fffffffffffffeb8._4_4_;
        x[2] = (float)in_stack_fffffffffffffeb8._8_4_;
        x[3] = (float)in_stack_fffffffffffffeb8._12_4_;
        x[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
        x[6] = (float)(int)in_stack_fffffffffffffed0;
        x[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
        x[8] = (float)(int)in_stack_fffffffffffffed8;
        x[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
        x[10] = (float)(int)in_stack_fffffffffffffee0;
        x[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        x[0xc] = (float)(int)in_stack_fffffffffffffee8;
        x[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
        x[0xe] = (float)(int)in_stack_fffffffffffffef0;
        x[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
        atan2512_ps(__return_storage_ptr__,y,x);
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1594;
        uVar279 = uVar279 + 0x10;
      }
      auVar287 = ZEXT816(0) << 0x40;
      auVar411._8_4_ = 0x80000000;
      auVar411._0_8_ = 0x8000000080000000;
      auVar411._12_4_ = 0x80000000;
      auVar411._16_4_ = 0x80000000;
      auVar411._20_4_ = 0x80000000;
      auVar411._24_4_ = 0x80000000;
      auVar411._28_4_ = 0x80000000;
      auVar495._8_4_ = 0x40490fdb;
      auVar495._0_8_ = 0x40490fdb40490fdb;
      auVar495._12_4_ = 0x40490fdb;
      auVar495._16_4_ = 0x40490fdb;
      auVar495._20_4_ = 0x40490fdb;
      auVar495._24_4_ = 0x40490fdb;
      auVar495._28_4_ = 0x40490fdb;
      auVar444._8_4_ = 0x7fffffff;
      auVar444._0_8_ = 0x7fffffff7fffffff;
      auVar444._12_4_ = 0x7fffffff;
      auVar444._16_4_ = 0x7fffffff;
      auVar444._20_4_ = 0x7fffffff;
      auVar444._24_4_ = 0x7fffffff;
      auVar444._28_4_ = 0x7fffffff;
      auVar558._8_4_ = 0x3f800000;
      auVar558._0_8_ = 0x3f8000003f800000;
      auVar558._12_4_ = 0x3f800000;
      auVar558._16_4_ = 0x3f800000;
      auVar558._20_4_ = 0x3f800000;
      auVar558._24_4_ = 0x3f800000;
      auVar558._28_4_ = 0x3f800000;
      auVar498._8_4_ = 0xbc83a25c;
      auVar498._0_8_ = 0xbc83a25cbc83a25c;
      auVar498._12_4_ = 0xbc83a25c;
      auVar498._16_4_ = 0xbc83a25c;
      auVar498._20_4_ = 0xbc83a25c;
      auVar498._24_4_ = 0xbc83a25c;
      auVar498._28_4_ = 0xbc83a25c;
      auVar499._8_4_ = 0xbd99b01e;
      auVar499._0_8_ = 0xbd99b01ebd99b01e;
      auVar499._12_4_ = 0xbd99b01e;
      auVar499._16_4_ = 0xbd99b01e;
      auVar499._20_4_ = 0xbd99b01e;
      auVar499._24_4_ = 0xbd99b01e;
      auVar499._28_4_ = 0xbd99b01e;
      auVar502._8_4_ = 0xbe117200;
      auVar502._0_8_ = 0xbe117200be117200;
      auVar502._12_4_ = 0xbe117200;
      auVar502._16_4_ = 0xbe117200;
      auVar502._20_4_ = 0xbe117200;
      auVar502._24_4_ = 0xbe117200;
      auVar502._28_4_ = 0xbe117200;
      auVar503._8_4_ = 0xbeaaaa53;
      auVar503._0_8_ = 0xbeaaaa53beaaaa53;
      auVar503._12_4_ = 0xbeaaaa53;
      auVar503._16_4_ = 0xbeaaaa53;
      auVar503._20_4_ = 0xbeaaaa53;
      auVar503._24_4_ = 0xbeaaaa53;
      auVar503._28_4_ = 0xbeaaaa53;
      auVar504._8_4_ = 0x3b3ac537;
      auVar504._0_8_ = 0x3b3ac5373b3ac537;
      auVar504._12_4_ = 0x3b3ac537;
      auVar504._16_4_ = 0x3b3ac537;
      auVar504._20_4_ = 0x3b3ac537;
      auVar504._24_4_ = 0x3b3ac537;
      auVar504._28_4_ = 0x3b3ac537;
      auVar420._8_4_ = 0x3d2edd4e;
      auVar420._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar420._12_4_ = 0x3d2edd4e;
      auVar420._16_4_ = 0x3d2edd4e;
      auVar420._20_4_ = 0x3d2edd4e;
      auVar420._24_4_ = 0x3d2edd4e;
      auVar420._28_4_ = 0x3d2edd4e;
      auVar421._8_4_ = 0x3dd9ed24;
      auVar421._0_8_ = 0x3dd9ed243dd9ed24;
      auVar421._12_4_ = 0x3dd9ed24;
      auVar421._16_4_ = 0x3dd9ed24;
      auVar421._20_4_ = 0x3dd9ed24;
      auVar421._24_4_ = 0x3dd9ed24;
      auVar421._28_4_ = 0x3dd9ed24;
      auVar422._8_4_ = 0x3e4cb974;
      auVar422._0_8_ = 0x3e4cb9743e4cb974;
      auVar422._12_4_ = 0x3e4cb974;
      auVar422._16_4_ = 0x3e4cb974;
      auVar422._20_4_ = 0x3e4cb974;
      auVar422._24_4_ = 0x3e4cb974;
      auVar422._28_4_ = 0x3e4cb974;
      auVar423._8_4_ = 0x3fc90fdb;
      auVar423._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar423._12_4_ = 0x3fc90fdb;
      auVar423._16_4_ = 0x3fc90fdb;
      auVar423._20_4_ = 0x3fc90fdb;
      auVar423._24_4_ = 0x3fc90fdb;
      auVar423._28_4_ = 0x3fc90fdb;
      auVar424._8_4_ = 0x40490fdb;
      auVar424._0_8_ = 0x40490fdb40490fdb;
      auVar424._12_4_ = 0x40490fdb;
      auVar424._16_4_ = 0x40490fdb;
      auVar424._20_4_ = 0x40490fdb;
      auVar424._24_4_ = 0x40490fdb;
      auVar424._28_4_ = 0x40490fdb;
      auVar425._8_4_ = 0x3fc90fdb;
      auVar425._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar425._12_4_ = 0x3fc90fdb;
      auVar425._16_4_ = 0x3fc90fdb;
      auVar425._20_4_ = 0x3fc90fdb;
      auVar425._24_4_ = 0x3fc90fdb;
      auVar425._28_4_ = 0x3fc90fdb;
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar418 = *(undefined1 (*) [32])(ptr + uVar279);
        auVar427 = *(undefined1 (*) [32])(ptr1 + uVar279);
        uVar283 = vcmpps_avx512vl(auVar427,ZEXT1632(auVar287),1);
        auVar412._8_4_ = 0xc0490fdb;
        auVar412._0_8_ = 0xc0490fdbc0490fdb;
        auVar412._12_4_ = 0xc0490fdb;
        auVar412._16_4_ = 0xc0490fdb;
        auVar412._20_4_ = 0xc0490fdb;
        auVar412._24_4_ = 0xc0490fdb;
        auVar412._28_4_ = 0xc0490fdb;
        auVar412 = vblendmps_avx512vl(auVar495,auVar412);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar419._0_4_ = (uint)bVar281 * auVar412._0_4_ | (uint)!bVar281 * in_ZMM18._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar419._4_4_ = (uint)bVar281 * auVar412._4_4_ | (uint)!bVar281 * in_ZMM18._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar419._8_4_ = (uint)bVar281 * auVar412._8_4_ | (uint)!bVar281 * in_ZMM18._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar419._12_4_ = (uint)bVar281 * auVar412._12_4_ | (uint)!bVar281 * in_ZMM18._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar419._16_4_ = (uint)bVar281 * auVar412._16_4_ | (uint)!bVar281 * in_ZMM18._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar419._20_4_ = (uint)bVar281 * auVar412._20_4_ | (uint)!bVar281 * in_ZMM18._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar419._24_4_ = (uint)bVar281 * auVar412._24_4_ | (uint)!bVar281 * in_ZMM18._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar419._28_4_ = (uint)bVar281 * auVar412._28_4_ | (uint)!bVar281 * in_ZMM18._28_4_;
        in_ZMM18 = ZEXT3264(auVar419);
        auVar412 = vdivps_avx512vl(auVar427,auVar418);
        vandps_avx512vl(auVar412,auVar444);
        uVar283 = vcmpps_avx512vl(auVar558,auVar412,1);
        auVar413._8_4_ = 0xbf800000;
        auVar413._0_8_ = 0xbf800000bf800000;
        auVar413._12_4_ = 0xbf800000;
        auVar413._16_4_ = 0xbf800000;
        auVar413._20_4_ = 0xbf800000;
        auVar413._24_4_ = 0xbf800000;
        auVar413._28_4_ = 0xbf800000;
        auVar413 = vblendmps_avx512vl(auVar412,auVar413);
        bVar11 = (byte)uVar283;
        auVar415._0_4_ =
             (uint)(bVar11 & 1) * auVar413._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar415._4_4_ = (uint)bVar281 * auVar413._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar415._8_4_ = (uint)bVar281 * auVar413._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar415._12_4_ = (uint)bVar281 * auVar413._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar415._16_4_ = (uint)bVar281 * auVar413._16_4_ | (uint)!bVar281 * in_ZMM21._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar415._20_4_ = (uint)bVar281 * auVar413._20_4_ | (uint)!bVar281 * in_ZMM21._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar415._24_4_ = (uint)bVar281 * auVar413._24_4_ | (uint)!bVar281 * in_ZMM21._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar415._28_4_ = (uint)bVar281 * auVar413._28_4_ | (uint)!bVar281 * in_ZMM21._28_4_;
        uVar282 = vcmpps_avx512vl(auVar427,ZEXT1632(auVar287),4);
        auVar413 = vdivps_avx512vl(auVar415,auVar412);
        auVar414._0_4_ = (uint)(bVar11 & 1) * auVar413._0_4_ | !(bool)(bVar11 & 1) * auVar415._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar414._4_4_ = (uint)bVar281 * auVar413._4_4_ | !bVar281 * auVar415._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar414._8_4_ = (uint)bVar281 * auVar413._8_4_ | !bVar281 * auVar415._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar414._12_4_ = (uint)bVar281 * auVar413._12_4_ | !bVar281 * auVar415._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar414._16_4_ = (uint)bVar281 * auVar413._16_4_ | !bVar281 * auVar415._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar414._20_4_ = (uint)bVar281 * auVar413._20_4_ | !bVar281 * auVar415._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar414._24_4_ = (uint)bVar281 * auVar413._24_4_ | !bVar281 * auVar415._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar414._28_4_ = (uint)bVar281 * auVar413._28_4_ | !bVar281 * auVar415._28_4_;
        in_ZMM21 = ZEXT3264(auVar414);
        auVar688 = ZEXT1632(auVar287);
        uVar284 = vcmpps_avx512vl(auVar418,auVar688,4);
        uVar284 = uVar282 & uVar284;
        uVar285 = vcmpps_avx512vl(auVar418,auVar688,1);
        auVar413 = vmulps_avx512vl(auVar414,auVar414);
        auVar415 = vmulps_avx512vl(auVar413,auVar413);
        auVar416 = vfmadd213ps_avx512vl(auVar498,auVar415,auVar499);
        auVar416 = vfmadd213ps_avx512vl(auVar416,auVar415,auVar502);
        auVar416 = vfmadd213ps_avx512vl(auVar416,auVar415,auVar503);
        auVar417 = vfmadd213ps_avx512vl(auVar504,auVar415,auVar420);
        auVar417 = vfmadd213ps_avx512vl(auVar417,auVar415,auVar421);
        auVar417 = vfmadd213ps_avx512vl(auVar417,auVar415,auVar422);
        auVar415 = vfmadd213ps_avx512vl(auVar417,auVar415,auVar558);
        auVar413 = vfmadd231ps_avx512vl(auVar415,auVar413,auVar416);
        auVar413 = vmulps_avx512vl(auVar413,auVar414);
        auVar415 = vaddps_avx512vl(auVar413,auVar423);
        auVar416._0_4_ =
             (uint)(bVar11 & 1) * auVar415._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar413._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar416._4_4_ = (uint)bVar281 * auVar415._4_4_ | (uint)!bVar281 * auVar413._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar416._8_4_ = (uint)bVar281 * auVar415._8_4_ | (uint)!bVar281 * auVar413._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar416._12_4_ = (uint)bVar281 * auVar415._12_4_ | (uint)!bVar281 * auVar413._12_4_;
        bVar281 = (bool)((byte)(uVar283 >> 4) & 1);
        auVar416._16_4_ = (uint)bVar281 * auVar415._16_4_ | (uint)!bVar281 * auVar413._16_4_;
        bVar281 = (bool)((byte)(uVar283 >> 5) & 1);
        auVar416._20_4_ = (uint)bVar281 * auVar415._20_4_ | (uint)!bVar281 * auVar413._20_4_;
        bVar281 = (bool)((byte)(uVar283 >> 6) & 1);
        auVar416._24_4_ = (uint)bVar281 * auVar415._24_4_ | (uint)!bVar281 * auVar413._24_4_;
        bVar281 = SUB81(uVar283 >> 7,0);
        auVar416._28_4_ = (uint)bVar281 * auVar415._28_4_ | (uint)!bVar281 * auVar413._28_4_;
        auVar412 = vpternlogd_avx512vl(auVar416,auVar412,auVar411,0xf8);
        auVar413 = vaddps_avx512vl(auVar412,auVar419);
        bVar281 = (bool)((byte)uVar285 & 1);
        bVar14 = (bool)((byte)(uVar285 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar285 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar285 >> 3) & 1);
        bVar20 = (bool)((byte)(uVar285 >> 4) & 1);
        bVar22 = (bool)((byte)(uVar285 >> 5) & 1);
        bVar24 = (bool)((byte)(uVar285 >> 6) & 1);
        bVar29 = SUB81(uVar285 >> 7,0);
        auVar418 = vpternlogd_avx512vl(auVar418,auVar424,auVar411,0xec);
        uVar1600 = vcmpps_avx512vl(auVar688,auVar418,2);
        bVar11 = ~((byte)uVar282 | (byte)uVar1600);
        auVar419 = vmovdqa32_avx512vl(auVar424);
        iVar276 = (uint)(bVar11 & 1) * auVar419._0_4_;
        iVar278 = (uint)(bVar11 >> 1 & 1) * auVar419._4_4_;
        auVar418._4_4_ = iVar278;
        auVar418._0_4_ = iVar276;
        iVar1 = (uint)(bVar11 >> 2 & 1) * auVar419._8_4_;
        auVar418._8_4_ = iVar1;
        iVar2 = (uint)(bVar11 >> 3 & 1) * auVar419._12_4_;
        auVar418._12_4_ = iVar2;
        iVar3 = (uint)(bVar11 >> 4 & 1) * auVar419._16_4_;
        auVar418._16_4_ = iVar3;
        iVar4 = (uint)(bVar11 >> 5 & 1) * auVar419._20_4_;
        auVar418._20_4_ = iVar4;
        iVar5 = (uint)(bVar11 >> 6 & 1) * auVar419._24_4_;
        auVar418._24_4_ = iVar5;
        iVar6 = (uint)(bVar11 >> 7) * auVar419._28_4_;
        auVar418._28_4_ = iVar6;
        auVar418 = vpternlogd_avx512vl(auVar427,auVar418,auVar411,0xec);
        auVar418 = vpord_avx512vl(auVar418,auVar425);
        bVar12 = (bool)((byte)uVar282 & 1);
        bVar15 = (bool)((byte)(uVar282 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar282 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar282 >> 3) & 1);
        bVar21 = (bool)((byte)(uVar282 >> 4) & 1);
        bVar23 = (bool)((byte)(uVar282 >> 5) & 1);
        bVar25 = (bool)((byte)(uVar282 >> 6) & 1);
        bVar30 = SUB81(uVar282 >> 7,0);
        bVar13 = (bool)((byte)uVar284 & 1);
        auVar427._0_4_ =
             (uint)bVar13 * ((uint)bVar281 * auVar413._0_4_ | (uint)!bVar281 * auVar412._0_4_) |
             (uint)!bVar13 * ((uint)bVar12 * auVar418._0_4_ | (uint)!bVar12 * iVar276);
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar427._4_4_ =
             (uint)bVar281 * ((uint)bVar14 * auVar413._4_4_ | (uint)!bVar14 * auVar412._4_4_) |
             (uint)!bVar281 * ((uint)bVar15 * auVar418._4_4_ | (uint)!bVar15 * iVar278);
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar427._8_4_ =
             (uint)bVar281 * ((uint)bVar16 * auVar413._8_4_ | (uint)!bVar16 * auVar412._8_4_) |
             (uint)!bVar281 * ((uint)bVar17 * auVar418._8_4_ | (uint)!bVar17 * iVar1);
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar427._12_4_ =
             (uint)bVar281 * ((uint)bVar18 * auVar413._12_4_ | (uint)!bVar18 * auVar412._12_4_) |
             (uint)!bVar281 * ((uint)bVar19 * auVar418._12_4_ | (uint)!bVar19 * iVar2);
        bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
        auVar427._16_4_ =
             (uint)bVar281 * ((uint)bVar20 * auVar413._16_4_ | (uint)!bVar20 * auVar412._16_4_) |
             (uint)!bVar281 * ((uint)bVar21 * auVar418._16_4_ | (uint)!bVar21 * iVar3);
        bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
        auVar427._20_4_ =
             (uint)bVar281 * ((uint)bVar22 * auVar413._20_4_ | (uint)!bVar22 * auVar412._20_4_) |
             (uint)!bVar281 * ((uint)bVar23 * auVar418._20_4_ | (uint)!bVar23 * iVar4);
        bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
        auVar427._24_4_ =
             (uint)bVar281 * ((uint)bVar24 * auVar413._24_4_ | (uint)!bVar24 * auVar412._24_4_) |
             (uint)!bVar281 * ((uint)bVar25 * auVar418._24_4_ | (uint)!bVar25 * iVar5);
        bVar281 = SUB81(uVar284 >> 7,0);
        auVar427._28_4_ =
             (uint)bVar281 * ((uint)bVar29 * auVar413._28_4_ | (uint)!bVar29 * auVar412._28_4_) |
             (uint)!bVar281 * ((uint)bVar30 * auVar418._28_4_ | (uint)!bVar30 * iVar6);
        *(undefined1 (*) [32])(outptr + uVar279) = auVar427;
      }
      auVar287 = ZEXT416(0) << 0x40;
      auVar350._8_4_ = 0x80000000;
      auVar350._0_8_ = 0x8000000080000000;
      auVar350._12_4_ = 0x80000000;
      auVar351._8_4_ = 0x40490fdb;
      auVar351._0_8_ = 0x40490fdb40490fdb;
      auVar351._12_4_ = 0x40490fdb;
      auVar354._8_4_ = 0x7fffffff;
      auVar354._0_8_ = 0x7fffffff7fffffff;
      auVar354._12_4_ = 0x7fffffff;
      auVar355._8_4_ = 0x3f800000;
      auVar355._0_8_ = 0x3f8000003f800000;
      auVar355._12_4_ = 0x3f800000;
      auVar356._8_4_ = 0xbc83a25c;
      auVar356._0_8_ = 0xbc83a25cbc83a25c;
      auVar356._12_4_ = 0xbc83a25c;
      auVar359._8_4_ = 0xbd99b01e;
      auVar359._0_8_ = 0xbd99b01ebd99b01e;
      auVar359._12_4_ = 0xbd99b01e;
      auVar360._8_4_ = 0xbe117200;
      auVar360._0_8_ = 0xbe117200be117200;
      auVar360._12_4_ = 0xbe117200;
      auVar395._8_4_ = 0xbeaaaa53;
      auVar395._0_8_ = 0xbeaaaa53beaaaa53;
      auVar395._12_4_ = 0xbeaaaa53;
      auVar396._8_4_ = 0x3b3ac537;
      auVar396._0_8_ = 0x3b3ac5373b3ac537;
      auVar396._12_4_ = 0x3b3ac537;
      auVar296._8_4_ = 0x3d2edd4e;
      auVar296._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar296._12_4_ = 0x3d2edd4e;
      auVar297._8_4_ = 0x3dd9ed24;
      auVar297._0_8_ = 0x3dd9ed243dd9ed24;
      auVar297._12_4_ = 0x3dd9ed24;
      auVar298._8_4_ = 0x3e4cb974;
      auVar298._0_8_ = 0x3e4cb9743e4cb974;
      auVar298._12_4_ = 0x3e4cb974;
      auVar299._8_4_ = 0x3fc90fdb;
      auVar299._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar299._12_4_ = 0x3fc90fdb;
      auVar300._8_4_ = 0x40490fdb;
      auVar300._0_8_ = 0x40490fdb40490fdb;
      auVar300._12_4_ = 0x40490fdb;
      auVar301._8_4_ = 0x3fc90fdb;
      auVar301._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar301._12_4_ = 0x3fc90fdb;
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar294 = *(undefined1 (*) [16])(ptr + uVar279);
        auVar303 = *(undefined1 (*) [16])(ptr1 + uVar279);
        uVar283 = vcmpps_avx512vl(auVar303,auVar287,1);
        auVar288._8_4_ = 0xc0490fdb;
        auVar288._0_8_ = 0xc0490fdbc0490fdb;
        auVar288._12_4_ = 0xc0490fdb;
        auVar288 = vblendmps_avx512vl(auVar351,auVar288);
        bVar281 = (bool)((byte)uVar283 & 1);
        auVar295._0_4_ = (uint)bVar281 * auVar288._0_4_ | (uint)!bVar281 * in_ZMM18._0_4_;
        bVar281 = (bool)((byte)(uVar283 >> 1) & 1);
        auVar295._4_4_ = (uint)bVar281 * auVar288._4_4_ | (uint)!bVar281 * in_ZMM18._4_4_;
        bVar281 = (bool)((byte)(uVar283 >> 2) & 1);
        auVar295._8_4_ = (uint)bVar281 * auVar288._8_4_ | (uint)!bVar281 * in_ZMM18._8_4_;
        bVar281 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar295._12_4_ = (uint)bVar281 * auVar288._12_4_ | (uint)!bVar281 * in_ZMM18._12_4_;
        in_ZMM18 = ZEXT1664(auVar295);
        uVar283 = vcmpps_avx512vl(auVar303,auVar287,4);
        uVar282 = vcmpps_avx512vl(auVar294,auVar287,4);
        uVar282 = uVar283 & uVar282;
        auVar288 = vdivps_avx512vl(auVar303,auVar294);
        auVar289 = vandps_avx512vl(auVar288,auVar354);
        uVar284 = vcmpps_avx512vl(auVar355,auVar289,1);
        auVar290._8_4_ = 0xbf800000;
        auVar290._0_8_ = 0xbf800000bf800000;
        auVar290._12_4_ = 0xbf800000;
        auVar290 = vblendmps_avx512vl(auVar289,auVar290);
        bVar11 = (byte)uVar284;
        auVar291._0_4_ =
             (uint)(bVar11 & 1) * auVar290._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar291._4_4_ = (uint)bVar281 * auVar290._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar291._8_4_ = (uint)bVar281 * auVar290._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar291._12_4_ = (uint)bVar281 * auVar290._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
        uVar285 = vcmpps_avx512vl(auVar294,auVar287,1);
        auVar290 = vdivps_avx512vl(auVar291,auVar289);
        auVar289._0_4_ = (uint)(bVar11 & 1) * auVar290._0_4_ | !(bool)(bVar11 & 1) * auVar291._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar289._4_4_ = (uint)bVar281 * auVar290._4_4_ | !bVar281 * auVar291._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar289._8_4_ = (uint)bVar281 * auVar290._8_4_ | !bVar281 * auVar291._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar289._12_4_ = (uint)bVar281 * auVar290._12_4_ | !bVar281 * auVar291._12_4_;
        in_ZMM21 = ZEXT1664(auVar289);
        auVar290 = vmulps_avx512vl(auVar289,auVar289);
        auVar291 = vmulps_avx512vl(auVar290,auVar290);
        auVar292 = vfmadd213ps_avx512vl(auVar356,auVar291,auVar359);
        auVar292 = vfmadd213ps_avx512vl(auVar292,auVar291,auVar360);
        auVar292 = vfmadd213ps_avx512vl(auVar292,auVar291,auVar395);
        auVar293 = vfmadd213ps_avx512vl(auVar396,auVar291,auVar296);
        auVar293 = vfmadd213ps_avx512vl(auVar293,auVar291,auVar297);
        auVar293 = vfmadd213ps_avx512vl(auVar293,auVar291,auVar298);
        auVar291 = vfmadd213ps_avx512vl(auVar293,auVar291,auVar355);
        auVar290 = vfmadd231ps_avx512vl(auVar291,auVar290,auVar292);
        auVar290 = vmulps_avx512vl(auVar290,auVar289);
        auVar289 = vaddps_avx512vl(auVar290,auVar299);
        auVar292._0_4_ =
             (uint)(bVar11 & 1) * auVar289._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar290._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar292._4_4_ = (uint)bVar281 * auVar289._4_4_ | (uint)!bVar281 * auVar290._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar292._8_4_ = (uint)bVar281 * auVar289._8_4_ | (uint)!bVar281 * auVar290._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar292._12_4_ = (uint)bVar281 * auVar289._12_4_ | (uint)!bVar281 * auVar290._12_4_;
        auVar288 = vpternlogd_avx512vl(auVar292,auVar288,auVar350,0xf8);
        auVar290 = vaddps_avx512vl(auVar288,auVar295);
        bVar281 = (bool)((byte)uVar285 & 1);
        bVar14 = (bool)((byte)(uVar285 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar285 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar294 = vpternlogd_avx512vl(auVar294,auVar300,auVar350,0xec);
        uVar1600 = vcmpps_avx512vl(auVar287,auVar294,2);
        uVar34 = ~((ushort)uVar283 | (ushort)uVar1600);
        auVar295 = vmovdqa32_avx512vl(auVar300);
        iVar276 = (uint)((byte)uVar34 & 1) * auVar295._0_4_;
        iVar1 = (uint)((byte)(uVar34 >> 1) & 1) * auVar295._4_4_;
        auVar294._4_4_ = iVar1;
        auVar294._0_4_ = iVar276;
        iVar278 = (uint)((byte)(uVar34 >> 2) & 1) * auVar295._8_4_;
        auVar294._8_4_ = iVar278;
        iVar2 = (uint)((byte)(uVar34 >> 3) & 1) * auVar295._12_4_;
        auVar294._12_4_ = iVar2;
        auVar294 = vpternlogd_avx512vl(auVar303,auVar294,auVar350,0xec);
        auVar294 = vpord_avx512vl(auVar294,auVar301);
        bVar12 = (bool)((byte)uVar283 & 1);
        bVar15 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar283 >> 3) & 1);
        bVar13 = (bool)((byte)uVar282 & 1);
        auVar303._0_4_ =
             (uint)bVar13 * ((uint)bVar281 * auVar290._0_4_ | (uint)!bVar281 * auVar288._0_4_) |
             (uint)!bVar13 * ((uint)bVar12 * auVar294._0_4_ | (uint)!bVar12 * iVar276);
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar303._4_4_ =
             (uint)bVar281 * ((uint)bVar14 * auVar290._4_4_ | (uint)!bVar14 * auVar288._4_4_) |
             (uint)!bVar281 * ((uint)bVar15 * auVar294._4_4_ | (uint)!bVar15 * iVar1);
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar303._8_4_ =
             (uint)bVar281 * ((uint)bVar16 * auVar290._8_4_ | (uint)!bVar16 * auVar288._8_4_) |
             (uint)!bVar281 * ((uint)bVar17 * auVar294._8_4_ | (uint)!bVar17 * iVar278);
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar303._12_4_ =
             (uint)bVar281 * ((uint)bVar18 * auVar290._12_4_ | (uint)!bVar18 * auVar288._12_4_) |
             (uint)!bVar281 * ((uint)bVar19 * auVar294._12_4_ | (uint)!bVar19 * iVar2);
        *(undefined1 (*) [16])(outptr + uVar279) = auVar303;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        pfVar1601 = outptr;
        fVar666 = atan2f(*(float *)((long)pfVar1599 + uVar279 * 4 + lVar280),
                         *(float *)((long)ptr + uVar279 * 4 + lVar280));
        *(float *)((long)outptr + uVar279 * 4 + lVar280) = fVar666;
        lVar280 = lVar280 + 4;
        outptr = pfVar1601;
      }
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_00380733;
      fVar666 = *ptr;
      auVar1597 = (undefined1  [12])0x0;
      if (iVar276 == 4) {
        auVar411 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])ptr);
        auVar1595 = ZEXT3264(auVar411);
        auVar287 = vmovdqa64_avx512vl(auVar411._0_16_);
        auVar1594 = ZEXT1664(auVar287);
      }
      else {
        auVar287 = vpbroadcastd_avx512vl(ZEXT416((uint)fVar666));
        auVar1594 = ZEXT1664(auVar287);
        if (iVar276 == 8) {
          auVar411 = vmovdqu64_avx512vl(*(undefined1 (*) [32])ptr);
          auVar1595 = ZEXT3264(auVar411);
        }
        else {
          auVar411 = vpbroadcastd_avx512vl(auVar287);
          auVar1595 = ZEXT3264(auVar411);
          if (iVar276 == 0x10) {
            auVar632 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_0038a8a1;
          }
        }
      }
      auVar632 = vinserti64x4_avx512f(auVar1595,auVar1595._0_32_,1);
LAB_0038a8a1:
      vmovdqu64_avx512f(auVar632);
      uVar279 = 0;
      auVar287 = vmovdqa64_avx512vl(auVar1594._0_16_);
      auVar632 = vmovdqu64_avx512f(auVar1595);
      pfVar1599 = ptr1;
      while( true ) {
        auVar350 = auVar1594._0_16_;
        if (iVar277 <= (int)uVar279 + 0xf) break;
        auVar1595 = vmovdqu64_avx512f(*(undefined1 (*) [64])(ptr1 + uVar279));
        y_17[1] = (float)auVar1597._0_4_;
        y_17[2] = (float)auVar1597._4_4_;
        y_17[3] = (float)auVar1597._8_4_;
        y_17[0] = fVar666;
        y_17._16_8_ = outptr;
        y_17[6] = (float)(int)in_stack_fffffffffffffe90;
        y_17[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
        y_17[8] = (float)in_stack_fffffffffffffe98._0_4_;
        y_17[9] = (float)in_stack_fffffffffffffe98._4_4_;
        y_17[10] = (float)in_stack_fffffffffffffe98._8_4_;
        y_17[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
        y_17[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
        y_17[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
        y_17[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
        y_17[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
        x_17[4] = (float)(int)pfVar1599;
        x_17[0] = (float)in_stack_fffffffffffffeb8._0_4_;
        x_17[1] = (float)in_stack_fffffffffffffeb8._4_4_;
        x_17[2] = (float)in_stack_fffffffffffffeb8._8_4_;
        x_17[3] = (float)in_stack_fffffffffffffeb8._12_4_;
        x_17[5] = (float)(int)((ulong)pfVar1599 >> 0x20);
        x_17[6] = (float)(int)in_stack_fffffffffffffed0;
        x_17[7] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
        x_17[8] = (float)(int)in_stack_fffffffffffffed8;
        x_17[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
        x_17[10] = (float)(int)in_stack_fffffffffffffee0;
        x_17[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        x_17[0xc] = (float)(int)in_stack_fffffffffffffee8;
        x_17[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
        x_17[0xe] = (float)(int)in_stack_fffffffffffffef0;
        x_17[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
        atan2512_ps(__return_storage_ptr__,y_17,x_17);
        auVar1594 = ZEXT1664(auVar287);
        auVar1595 = vmovdqu64_avx512f(auVar1595);
        *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
        uVar279 = uVar279 + 0x10;
        auVar1595 = auVar632;
      }
      auVar717._8_4_ = 0x40490fdb;
      auVar717._0_8_ = 0x40490fdb40490fdb;
      auVar717._12_4_ = 0x40490fdb;
      auVar717._16_4_ = 0x40490fdb;
      auVar717._20_4_ = 0x40490fdb;
      auVar717._24_4_ = 0x40490fdb;
      auVar717._28_4_ = 0x40490fdb;
      auVar1016._8_4_ = 0x80000000;
      auVar1016._0_8_ = 0x8000000080000000;
      auVar1016._12_4_ = 0x80000000;
      auVar1016._16_4_ = 0x80000000;
      auVar1016._20_4_ = 0x80000000;
      auVar1016._24_4_ = 0x80000000;
      auVar1016._28_4_ = 0x80000000;
      auVar444 = auVar1595._0_32_;
      auVar411 = vpternlogd_avx512vl(auVar1016,auVar444,auVar717,0xea);
      auVar810._8_4_ = 0x3f800000;
      auVar810._0_8_ = 0x3f8000003f800000;
      auVar810._12_4_ = 0x3f800000;
      auVar810._16_4_ = 0x3f800000;
      auVar810._20_4_ = 0x3f800000;
      auVar810._24_4_ = 0x3f800000;
      auVar810._28_4_ = 0x3f800000;
      auVar495 = vdivps_avx512vl(auVar810,auVar444);
      auVar287 = ZEXT816(0) << 0x40;
      uVar1600 = vcmpps_avx512vl(ZEXT1632(auVar287),auVar411,2);
      uVar283 = vcmpps_avx512vl(auVar444,ZEXT1632(auVar287),1);
      auVar1017._8_4_ = 0x80000000;
      auVar1017._0_8_ = 0x8000000080000000;
      auVar1017._12_4_ = 0x80000000;
      auVar1017._16_4_ = 0x80000000;
      auVar1017._20_4_ = 0x80000000;
      auVar1017._24_4_ = 0x80000000;
      auVar1017._28_4_ = 0x80000000;
      auVar1071._8_4_ = 0x40490fdb;
      auVar1071._0_8_ = 0x40490fdb40490fdb;
      auVar1071._12_4_ = 0x40490fdb;
      auVar1071._16_4_ = 0x40490fdb;
      auVar1071._20_4_ = 0x40490fdb;
      auVar1071._24_4_ = 0x40490fdb;
      auVar1071._28_4_ = 0x40490fdb;
      auVar1124._8_4_ = 0x7fffffff;
      auVar1124._0_8_ = 0x7fffffff7fffffff;
      auVar1124._12_4_ = 0x7fffffff;
      auVar1124._16_4_ = 0x7fffffff;
      auVar1124._20_4_ = 0x7fffffff;
      auVar1124._24_4_ = 0x7fffffff;
      auVar1124._28_4_ = 0x7fffffff;
      auVar1171._8_4_ = 0xbc83a25c;
      auVar1171._0_8_ = 0xbc83a25cbc83a25c;
      auVar1171._12_4_ = 0xbc83a25c;
      auVar1171._16_4_ = 0xbc83a25c;
      auVar1171._20_4_ = 0xbc83a25c;
      auVar1171._24_4_ = 0xbc83a25c;
      auVar1171._28_4_ = 0xbc83a25c;
      auVar1221._8_4_ = 0xbd99b01e;
      auVar1221._0_8_ = 0xbd99b01ebd99b01e;
      auVar1221._12_4_ = 0xbd99b01e;
      auVar1221._16_4_ = 0xbd99b01e;
      auVar1221._20_4_ = 0xbd99b01e;
      auVar1221._24_4_ = 0xbd99b01e;
      auVar1221._28_4_ = 0xbd99b01e;
      auVar1271._8_4_ = 0xbe117200;
      auVar1271._0_8_ = 0xbe117200be117200;
      auVar1271._12_4_ = 0xbe117200;
      auVar1271._16_4_ = 0xbe117200;
      auVar1271._20_4_ = 0xbe117200;
      auVar1271._24_4_ = 0xbe117200;
      auVar1271._28_4_ = 0xbe117200;
      auVar1323._8_4_ = 0xbeaaaa53;
      auVar1323._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1323._12_4_ = 0xbeaaaa53;
      auVar1323._16_4_ = 0xbeaaaa53;
      auVar1323._20_4_ = 0xbeaaaa53;
      auVar1323._24_4_ = 0xbeaaaa53;
      auVar1323._28_4_ = 0xbeaaaa53;
      auVar1377._8_4_ = 0x3b3ac537;
      auVar1377._0_8_ = 0x3b3ac5373b3ac537;
      auVar1377._12_4_ = 0x3b3ac537;
      auVar1377._16_4_ = 0x3b3ac537;
      auVar1377._20_4_ = 0x3b3ac537;
      auVar1377._24_4_ = 0x3b3ac537;
      auVar1377._28_4_ = 0x3b3ac537;
      auVar1431._8_4_ = 0x3d2edd4e;
      auVar1431._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1431._12_4_ = 0x3d2edd4e;
      auVar1431._16_4_ = 0x3d2edd4e;
      auVar1431._20_4_ = 0x3d2edd4e;
      auVar1431._24_4_ = 0x3d2edd4e;
      auVar1431._28_4_ = 0x3d2edd4e;
      auVar1485._8_4_ = 0x3dd9ed24;
      auVar1485._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1485._12_4_ = 0x3dd9ed24;
      auVar1485._16_4_ = 0x3dd9ed24;
      auVar1485._20_4_ = 0x3dd9ed24;
      auVar1485._24_4_ = 0x3dd9ed24;
      auVar1485._28_4_ = 0x3dd9ed24;
      auVar1538._8_4_ = 0x3e4cb974;
      auVar1538._0_8_ = 0x3e4cb9743e4cb974;
      auVar1538._12_4_ = 0x3e4cb974;
      auVar1538._16_4_ = 0x3e4cb974;
      auVar1538._20_4_ = 0x3e4cb974;
      auVar1538._24_4_ = 0x3e4cb974;
      auVar1538._28_4_ = 0x3e4cb974;
      auVar1590._8_4_ = 0x3fc90fdb;
      auVar1590._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1590._12_4_ = 0x3fc90fdb;
      auVar1590._16_4_ = 0x3fc90fdb;
      auVar1590._20_4_ = 0x3fc90fdb;
      auVar1590._24_4_ = 0x3fc90fdb;
      auVar1590._28_4_ = 0x3fc90fdb;
      auVar411 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
        auVar558 = *(undefined1 (*) [32])(ptr1 + uVar279);
        auVar502 = ZEXT1632(auVar287);
        uVar282 = vcmpps_avx512vl(auVar558,auVar502,1);
        auVar97._8_4_ = 0xc0490fdb;
        auVar97._0_8_ = 0xc0490fdbc0490fdb;
        auVar97._12_4_ = 0xc0490fdb;
        auVar97._16_4_ = 0xc0490fdb;
        auVar97._20_4_ = 0xc0490fdb;
        auVar97._24_4_ = 0xc0490fdb;
        auVar97._28_4_ = 0xc0490fdb;
        auVar498 = vblendmps_avx512vl(auVar1071,auVar97);
        bVar281 = (bool)((byte)uVar282 & 1);
        auVar555._0_4_ = (uint)bVar281 * auVar498._0_4_ | (uint)!bVar281 * in_ZMM18._0_4_;
        bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
        auVar555._4_4_ = (uint)bVar281 * auVar498._4_4_ | (uint)!bVar281 * in_ZMM18._4_4_;
        bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
        auVar555._8_4_ = (uint)bVar281 * auVar498._8_4_ | (uint)!bVar281 * in_ZMM18._8_4_;
        bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
        auVar555._12_4_ = (uint)bVar281 * auVar498._12_4_ | (uint)!bVar281 * in_ZMM18._12_4_;
        bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
        auVar555._16_4_ = (uint)bVar281 * auVar498._16_4_ | (uint)!bVar281 * in_ZMM18._16_4_;
        bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
        auVar555._20_4_ = (uint)bVar281 * auVar498._20_4_ | (uint)!bVar281 * in_ZMM18._20_4_;
        bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
        auVar555._24_4_ = (uint)bVar281 * auVar498._24_4_ | (uint)!bVar281 * in_ZMM18._24_4_;
        bVar281 = SUB81(uVar282 >> 7,0);
        auVar555._28_4_ = (uint)bVar281 * auVar498._28_4_ | (uint)!bVar281 * in_ZMM18._28_4_;
        uVar282 = vcmpps_avx512vl(auVar558,auVar502,4);
        auVar498 = vmulps_avx512vl(auVar558,auVar495);
        vandps_avx512vl(auVar498,auVar1124);
        uVar284 = vcmpps_avx512vl(auVar810,auVar498,1);
        auVar98._8_4_ = 0xbf800000;
        auVar98._0_8_ = 0xbf800000bf800000;
        auVar98._12_4_ = 0xbf800000;
        auVar98._16_4_ = 0xbf800000;
        auVar98._20_4_ = 0xbf800000;
        auVar98._24_4_ = 0xbf800000;
        auVar98._28_4_ = 0xbf800000;
        auVar499 = vblendmps_avx512vl(auVar498,auVar98);
        bVar11 = (byte)uVar284;
        auVar556._0_4_ =
             (uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar556._4_4_ = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar556._8_4_ = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar556._12_4_ = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
        bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
        auVar556._16_4_ = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * in_ZMM21._16_4_;
        bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
        auVar556._20_4_ = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * in_ZMM21._20_4_;
        bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
        auVar556._24_4_ = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * in_ZMM21._24_4_;
        bVar281 = SUB81(uVar284 >> 7,0);
        auVar556._28_4_ = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * in_ZMM21._28_4_;
        uVar285 = vcmpps_avx512vl(auVar444,auVar502,4);
        uVar285 = uVar282 & uVar285;
        auVar499 = vdivps_avx512vl(auVar556,auVar498);
        auVar557._0_4_ = (uint)(bVar11 & 1) * auVar499._0_4_ | !(bool)(bVar11 & 1) * auVar556._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar557._4_4_ = (uint)bVar281 * auVar499._4_4_ | !bVar281 * auVar556._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar557._8_4_ = (uint)bVar281 * auVar499._8_4_ | !bVar281 * auVar556._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar557._12_4_ = (uint)bVar281 * auVar499._12_4_ | !bVar281 * auVar556._12_4_;
        bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
        auVar557._16_4_ = (uint)bVar281 * auVar499._16_4_ | !bVar281 * auVar556._16_4_;
        bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
        auVar557._20_4_ = (uint)bVar281 * auVar499._20_4_ | !bVar281 * auVar556._20_4_;
        bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
        auVar557._24_4_ = (uint)bVar281 * auVar499._24_4_ | !bVar281 * auVar556._24_4_;
        bVar281 = SUB81(uVar284 >> 7,0);
        auVar557._28_4_ = (uint)bVar281 * auVar499._28_4_ | !bVar281 * auVar556._28_4_;
        in_ZMM21 = ZEXT3264(auVar557);
        vandps_avx512vl(auVar558,auVar1017);
        auVar558 = vmulps_avx512vl(auVar557,auVar557);
        auVar499 = vmulps_avx512vl(auVar558,auVar558);
        auVar502 = vfmadd213ps_avx512vl(auVar1171,auVar499,auVar1221);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1271);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar499,auVar1323);
        auVar503 = vfmadd213ps_avx512vl(auVar1377,auVar499,auVar1431);
        auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1485);
        auVar503 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar1538);
        auVar499 = vfmadd213ps_avx512vl(auVar503,auVar499,auVar810);
        auVar558 = vfmadd231ps_avx512vl(auVar499,auVar558,auVar502);
        auVar558 = vmulps_avx512vl(auVar558,auVar557);
        auVar499 = vaddps_avx512vl(auVar558,auVar1590);
        auVar559._0_4_ =
             (uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar558._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar559._4_4_ = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * auVar558._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar559._8_4_ = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * auVar558._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar559._12_4_ = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * auVar558._12_4_;
        bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
        auVar559._16_4_ = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * auVar558._16_4_;
        bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
        auVar559._20_4_ = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * auVar558._20_4_;
        bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
        auVar559._24_4_ = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * auVar558._24_4_;
        bVar281 = SUB81(uVar284 >> 7,0);
        auVar559._28_4_ = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * auVar558._28_4_;
        auVar558 = vpternlogd_avx512vl(auVar559,auVar498,auVar1017,0xf8);
        auVar498 = vaddps_avx512vl(auVar558,auVar555);
        bVar281 = (bool)((byte)uVar283 & 1);
        bVar13 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar283 >> 3) & 1);
        bVar19 = (bool)((byte)(uVar283 >> 4) & 1);
        bVar21 = (bool)((byte)(uVar283 >> 5) & 1);
        bVar23 = (bool)((byte)(uVar283 >> 6) & 1);
        bVar25 = SUB81(uVar283 >> 7,0);
        auVar499 = vorps_avx512vl(auVar557,auVar411);
        auVar560._4_4_ = (uint)((byte)(uVar282 >> 1) & 1) * auVar499._4_4_;
        auVar560._0_4_ = (uint)((byte)uVar282 & 1) * auVar499._0_4_;
        auVar560._8_4_ = (uint)((byte)(uVar282 >> 2) & 1) * auVar499._8_4_;
        auVar560._12_4_ = (uint)((byte)(uVar282 >> 3) & 1) * auVar499._12_4_;
        auVar560._16_4_ = (uint)((byte)(uVar282 >> 4) & 1) * auVar499._16_4_;
        auVar560._20_4_ = (uint)((byte)(uVar282 >> 5) & 1) * auVar499._20_4_;
        auVar560._24_4_ = (uint)((byte)(uVar282 >> 6) & 1) * auVar499._24_4_;
        auVar560._28_4_ = (uint)(byte)(uVar282 >> 7) * auVar499._28_4_;
        bVar11 = (byte)uVar282 | (byte)uVar1600;
        auVar499 = vorps_avx512vl(auVar560,auVar717);
        auVar502 = vmovdqa32_avx512vl(auVar560);
        bVar14 = (bool)(bVar11 >> 1 & 1);
        bVar16 = (bool)(bVar11 >> 2 & 1);
        bVar18 = (bool)(bVar11 >> 3 & 1);
        bVar20 = (bool)(bVar11 >> 4 & 1);
        bVar22 = (bool)(bVar11 >> 5 & 1);
        bVar24 = (bool)(bVar11 >> 6 & 1);
        bVar12 = (bool)((byte)uVar285 & 1);
        auVar561._0_4_ =
             (uint)bVar12 * ((uint)bVar281 * auVar498._0_4_ | (uint)!bVar281 * auVar558._0_4_) |
             (uint)!bVar12 *
             ((uint)(bVar11 & 1) * auVar502._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar499._0_4_);
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar561._4_4_ =
             (uint)bVar281 * ((uint)bVar13 * auVar498._4_4_ | (uint)!bVar13 * auVar558._4_4_) |
             (uint)!bVar281 * ((uint)bVar14 * auVar502._4_4_ | (uint)!bVar14 * auVar499._4_4_);
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar561._8_4_ =
             (uint)bVar281 * ((uint)bVar15 * auVar498._8_4_ | (uint)!bVar15 * auVar558._8_4_) |
             (uint)!bVar281 * ((uint)bVar16 * auVar502._8_4_ | (uint)!bVar16 * auVar499._8_4_);
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar561._12_4_ =
             (uint)bVar281 * ((uint)bVar17 * auVar498._12_4_ | (uint)!bVar17 * auVar558._12_4_) |
             (uint)!bVar281 * ((uint)bVar18 * auVar502._12_4_ | (uint)!bVar18 * auVar499._12_4_);
        bVar281 = (bool)((byte)(uVar285 >> 4) & 1);
        auVar561._16_4_ =
             (uint)bVar281 * ((uint)bVar19 * auVar498._16_4_ | (uint)!bVar19 * auVar558._16_4_) |
             (uint)!bVar281 * ((uint)bVar20 * auVar502._16_4_ | (uint)!bVar20 * auVar499._16_4_);
        bVar281 = (bool)((byte)(uVar285 >> 5) & 1);
        auVar561._20_4_ =
             (uint)bVar281 * ((uint)bVar21 * auVar498._20_4_ | (uint)!bVar21 * auVar558._20_4_) |
             (uint)!bVar281 * ((uint)bVar22 * auVar502._20_4_ | (uint)!bVar22 * auVar499._20_4_);
        bVar281 = (bool)((byte)(uVar285 >> 6) & 1);
        auVar561._24_4_ =
             (uint)bVar281 * ((uint)bVar23 * auVar498._24_4_ | (uint)!bVar23 * auVar558._24_4_) |
             (uint)!bVar281 * ((uint)bVar24 * auVar502._24_4_ | (uint)!bVar24 * auVar499._24_4_);
        bVar281 = SUB81(uVar285 >> 7,0);
        auVar561._28_4_ =
             (uint)bVar281 * ((uint)bVar25 * auVar498._28_4_ | (uint)!bVar25 * auVar558._28_4_) |
             (uint)!bVar281 *
             ((uint)(bVar11 >> 7) * auVar502._28_4_ | (uint)!(bool)(bVar11 >> 7) * auVar499._28_4_);
        in_ZMM18 = ZEXT3264(auVar561);
        *(undefined1 (*) [32])(outptr + uVar279) = auVar561;
      }
      auVar686._8_4_ = 0x40490fdb;
      auVar686._0_8_ = 0x40490fdb40490fdb;
      auVar686._12_4_ = 0x40490fdb;
      auVar984._8_4_ = 0x80000000;
      auVar984._0_8_ = 0x8000000080000000;
      auVar984._12_4_ = 0x80000000;
      auVar287 = vpternlogd_avx512vl(auVar984,auVar350,auVar686,0xea);
      auVar767._8_4_ = 0x3f800000;
      auVar767._0_8_ = 0x3f8000003f800000;
      auVar767._12_4_ = 0x3f800000;
      auVar351 = vdivps_avx512vl(auVar767,auVar350);
      auVar354 = ZEXT416(0) << 0x40;
      uVar1600 = vcmpps_avx512vl(auVar354,auVar287,2);
      uVar283 = vcmpps_avx512vl(auVar350,auVar354,1);
      auVar985._8_4_ = 0x80000000;
      auVar985._0_8_ = 0x8000000080000000;
      auVar985._12_4_ = 0x80000000;
      auVar1039._8_4_ = 0x40490fdb;
      auVar1039._0_8_ = 0x40490fdb40490fdb;
      auVar1039._12_4_ = 0x40490fdb;
      auVar1094._8_4_ = 0x7fffffff;
      auVar1094._0_8_ = 0x7fffffff7fffffff;
      auVar1094._12_4_ = 0x7fffffff;
      auVar1147._8_4_ = 0xbc83a25c;
      auVar1147._0_8_ = 0xbc83a25cbc83a25c;
      auVar1147._12_4_ = 0xbc83a25c;
      auVar1194._8_4_ = 0xbd99b01e;
      auVar1194._0_8_ = 0xbd99b01ebd99b01e;
      auVar1194._12_4_ = 0xbd99b01e;
      auVar1244._8_4_ = 0xbe117200;
      auVar1244._0_8_ = 0xbe117200be117200;
      auVar1244._12_4_ = 0xbe117200;
      auVar1292._8_4_ = 0xbeaaaa53;
      auVar1292._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1292._12_4_ = 0xbeaaaa53;
      auVar1346._8_4_ = 0x3b3ac537;
      auVar1346._0_8_ = 0x3b3ac5373b3ac537;
      auVar1346._12_4_ = 0x3b3ac537;
      auVar1400._8_4_ = 0x3d2edd4e;
      auVar1400._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1400._12_4_ = 0x3d2edd4e;
      auVar1454._8_4_ = 0x3dd9ed24;
      auVar1454._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1454._12_4_ = 0x3dd9ed24;
      auVar1507._8_4_ = 0x3e4cb974;
      auVar1507._0_8_ = 0x3e4cb9743e4cb974;
      auVar1507._12_4_ = 0x3e4cb974;
      auVar1560._8_4_ = 0x3fc90fdb;
      auVar1560._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1560._12_4_ = 0x3fc90fdb;
      auVar287 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
        auVar355 = *(undefined1 (*) [16])(ptr1 + uVar279);
        uVar282 = vcmpps_avx512vl(auVar355,auVar354,4);
        uVar284 = vcmpps_avx512vl(auVar355,auVar354,1);
        auVar38._8_4_ = 0xc0490fdb;
        auVar38._0_8_ = 0xc0490fdbc0490fdb;
        auVar38._12_4_ = 0xc0490fdb;
        auVar356 = vblendmps_avx512vl(auVar1039,auVar38);
        bVar281 = (bool)((byte)uVar284 & 1);
        auVar392._0_4_ = (uint)bVar281 * auVar356._0_4_ | (uint)!bVar281 * in_ZMM18._0_4_;
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar392._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * in_ZMM18._4_4_;
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar392._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * in_ZMM18._8_4_;
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar392._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * in_ZMM18._12_4_;
        uVar284 = vcmpps_avx512vl(auVar350,auVar354,4);
        uVar284 = uVar282 & uVar284;
        auVar356 = vandps_avx512vl(auVar355,auVar985);
        auVar355 = vmulps_avx512vl(auVar355,auVar351);
        auVar359 = vandps_avx512vl(auVar355,auVar1094);
        uVar285 = vcmpps_avx512vl(auVar767,auVar359,1);
        auVar39._8_4_ = 0xbf800000;
        auVar39._0_8_ = 0xbf800000bf800000;
        auVar39._12_4_ = 0xbf800000;
        auVar360 = vblendmps_avx512vl(auVar359,auVar39);
        bVar11 = (byte)uVar285;
        auVar393._0_4_ =
             (uint)(bVar11 & 1) * auVar360._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM21._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar393._4_4_ = (uint)bVar281 * auVar360._4_4_ | (uint)!bVar281 * in_ZMM21._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar393._8_4_ = (uint)bVar281 * auVar360._8_4_ | (uint)!bVar281 * in_ZMM21._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar393._12_4_ = (uint)bVar281 * auVar360._12_4_ | (uint)!bVar281 * in_ZMM21._12_4_;
        auVar359 = vdivps_avx512vl(auVar393,auVar359);
        auVar394._0_4_ = (uint)(bVar11 & 1) * auVar359._0_4_ | !(bool)(bVar11 & 1) * auVar393._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar394._4_4_ = (uint)bVar281 * auVar359._4_4_ | !bVar281 * auVar393._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar394._8_4_ = (uint)bVar281 * auVar359._8_4_ | !bVar281 * auVar393._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar394._12_4_ = (uint)bVar281 * auVar359._12_4_ | !bVar281 * auVar393._12_4_;
        in_ZMM21 = ZEXT1664(auVar394);
        auVar359 = vmulps_avx512vl(auVar394,auVar394);
        auVar360 = vmulps_avx512vl(auVar359,auVar359);
        auVar395 = vfmadd213ps_avx512vl(auVar1147,auVar360,auVar1194);
        auVar395 = vfmadd213ps_avx512vl(auVar395,auVar360,auVar1244);
        auVar395 = vfmadd213ps_avx512vl(auVar395,auVar360,auVar1292);
        auVar396 = vfmadd213ps_avx512vl(auVar1346,auVar360,auVar1400);
        auVar396 = vfmadd213ps_avx512vl(auVar396,auVar360,auVar1454);
        auVar396 = vfmadd213ps_avx512vl(auVar396,auVar360,auVar1507);
        auVar360 = vfmadd213ps_avx512vl(auVar396,auVar360,auVar767);
        auVar359 = vfmadd231ps_avx512vl(auVar360,auVar359,auVar395);
        auVar359 = vmulps_avx512vl(auVar359,auVar394);
        auVar360 = vaddps_avx512vl(auVar359,auVar1560);
        auVar397._0_4_ =
             (uint)(bVar11 & 1) * auVar360._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar359._0_4_;
        bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
        auVar397._4_4_ = (uint)bVar281 * auVar360._4_4_ | (uint)!bVar281 * auVar359._4_4_;
        bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
        auVar397._8_4_ = (uint)bVar281 * auVar360._8_4_ | (uint)!bVar281 * auVar359._8_4_;
        bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
        auVar397._12_4_ = (uint)bVar281 * auVar360._12_4_ | (uint)!bVar281 * auVar359._12_4_;
        auVar355 = vpternlogd_avx512vl(auVar397,auVar355,auVar985,0xf8);
        auVar359 = vaddps_avx512vl(auVar355,auVar392);
        bVar281 = (bool)((byte)uVar283 & 1);
        bVar14 = (bool)((byte)(uVar283 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar283 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar283 >> 3) & 1);
        auVar356 = vorps_avx512vl(auVar356,auVar287);
        auVar398._4_4_ = (uint)((byte)(uVar282 >> 1) & 1) * auVar356._4_4_;
        auVar398._0_4_ = (uint)((byte)uVar282 & 1) * auVar356._0_4_;
        auVar398._8_4_ = (uint)((byte)(uVar282 >> 2) & 1) * auVar356._8_4_;
        auVar398._12_4_ = (uint)((byte)(uVar282 >> 3) & 1) * auVar356._12_4_;
        uVar34 = (ushort)uVar282 | (ushort)uVar1600;
        auVar356 = vorps_avx512vl(auVar398,auVar686);
        auVar360 = vmovdqa32_avx512vl(auVar398);
        bVar12 = (bool)((byte)uVar34 & 1);
        bVar15 = (bool)((byte)(uVar34 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar34 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar34 >> 3) & 1);
        bVar13 = (bool)((byte)uVar284 & 1);
        auVar399._0_4_ =
             (uint)bVar13 * ((uint)bVar281 * auVar359._0_4_ | (uint)!bVar281 * auVar355._0_4_) |
             (uint)!bVar13 * ((uint)bVar12 * auVar360._0_4_ | (uint)!bVar12 * auVar356._0_4_);
        bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
        auVar399._4_4_ =
             (uint)bVar281 * ((uint)bVar14 * auVar359._4_4_ | (uint)!bVar14 * auVar355._4_4_) |
             (uint)!bVar281 * ((uint)bVar15 * auVar360._4_4_ | (uint)!bVar15 * auVar356._4_4_);
        bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
        auVar399._8_4_ =
             (uint)bVar281 * ((uint)bVar16 * auVar359._8_4_ | (uint)!bVar16 * auVar355._8_4_) |
             (uint)!bVar281 * ((uint)bVar17 * auVar360._8_4_ | (uint)!bVar17 * auVar356._8_4_);
        bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
        auVar399._12_4_ =
             (uint)bVar281 * ((uint)bVar18 * auVar359._12_4_ | (uint)!bVar18 * auVar355._12_4_) |
             (uint)!bVar281 * ((uint)bVar19 * auVar360._12_4_ | (uint)!bVar19 * auVar356._12_4_);
        in_ZMM18 = ZEXT1664(auVar399);
        *(undefined1 (*) [16])(outptr + uVar279) = auVar399;
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        pfVar1601 = outptr;
        fVar667 = atan2f(*(float *)((long)pfVar1599 + uVar279 * 4 + lVar280),fVar666);
        *(float *)((long)outptr + uVar279 * 4 + lVar280) = fVar667;
        lVar280 = lVar280 + 4;
        outptr = pfVar1601;
      }
      return;
    }
    fVar666 = *ptr1;
    uVar1603 = 0;
    uVar1600 = 0;
    if (iVar276 == 4) {
      auVar411 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])ptr1);
      auVar1595 = ZEXT3264(auVar411);
      auVar287 = vmovdqa64_avx512vl(auVar411._0_16_);
      auVar1594 = ZEXT1664(auVar287);
    }
    else {
      auVar287 = vpbroadcastd_avx512vl(ZEXT416((uint)fVar666));
      auVar1594 = ZEXT1664(auVar287);
      if (iVar276 == 8) {
        auVar411 = vmovdqu64_avx512vl(*(undefined1 (*) [32])ptr1);
        auVar1595 = ZEXT3264(auVar411);
      }
      else {
        auVar411 = vpbroadcastd_avx512vl(auVar287);
        auVar1595 = ZEXT3264(auVar411);
        if (iVar276 == 0x10) {
          auVar632 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_00386b74;
        }
      }
    }
    auVar632 = vinserti64x4_avx512f(auVar1595,auVar1595._0_32_,1);
LAB_00386b74:
    auVar632 = vmovdqu64_avx512f(auVar632);
    uVar279 = 0;
    auVar287 = vmovdqa64_avx512vl(auVar1594._0_16_);
    uVar1596 = auVar287._0_4_;
    auVar1597 = auVar287._4_12_;
    auVar573 = vmovdqu64_avx512f(auVar1595);
    for (; auVar287 = auVar1594._0_16_, (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar1595 = vmovdqu64_avx512f(auVar632);
      y_11[1] = (float)auVar1597._0_4_;
      y_11[2] = (float)auVar1597._4_4_;
      y_11[3] = (float)auVar1597._8_4_;
      y_11[0] = (float)uVar1596;
      y_11._16_8_ = outptr;
      y_11[6] = (float)(int)in_stack_fffffffffffffe90;
      y_11[7] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
      y_11[8] = (float)in_stack_fffffffffffffe98._0_4_;
      y_11[9] = (float)in_stack_fffffffffffffe98._4_4_;
      y_11[10] = (float)in_stack_fffffffffffffe98._8_4_;
      y_11[0xb] = (float)in_stack_fffffffffffffe98._12_4_;
      y_11[0xc] = (float)in_stack_fffffffffffffea8._0_4_;
      y_11[0xd] = (float)in_stack_fffffffffffffea8._4_4_;
      y_11[0xe] = (float)in_stack_fffffffffffffea8._8_4_;
      y_11[0xf] = (float)in_stack_fffffffffffffea8._12_4_;
      x_11[4] = fVar666;
      x_11[0] = (float)in_stack_fffffffffffffeb8._0_4_;
      x_11[1] = (float)in_stack_fffffffffffffeb8._4_4_;
      x_11[2] = (float)in_stack_fffffffffffffeb8._8_4_;
      x_11[3] = (float)in_stack_fffffffffffffeb8._12_4_;
      x_11[5] = (float)uVar1603;
      x_11[6] = (float)(int)uVar1600;
      x_11[7] = (float)(int)((ulong)uVar1600 >> 0x20);
      x_11[8] = (float)(int)in_stack_fffffffffffffed8;
      x_11[9] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      x_11[10] = (float)(int)in_stack_fffffffffffffee0;
      x_11[0xb] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
      x_11[0xc] = (float)(int)in_stack_fffffffffffffee8;
      x_11[0xd] = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      x_11[0xe] = (float)(int)in_stack_fffffffffffffef0;
      x_11[0xf] = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
      atan2512_ps(__return_storage_ptr__,y_11,x_11);
      auVar1594 = ZEXT1664(CONCAT124(auVar1597,uVar1596));
      auVar1595 = vmovdqu64_avx512f(auVar1595);
      *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
      auVar1595 = auVar573;
    }
    auVar94._8_4_ = 0x80000000;
    auVar94._0_8_ = 0x8000000080000000;
    auVar94._12_4_ = 0x80000000;
    auVar94._16_4_ = 0x80000000;
    auVar94._20_4_ = 0x80000000;
    auVar94._24_4_ = 0x80000000;
    auVar94._28_4_ = 0x80000000;
    auVar558 = auVar1595._0_32_;
    auVar411 = vpandd_avx512vl(auVar558,auVar94);
    auVar444 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    uVar283 = vcmpps_avx512vl(auVar558,auVar444,4);
    uVar282 = vcmpps_avx512vl(auVar558,auVar444,1);
    auVar495 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
    bVar281 = (bool)((byte)uVar282 & 1);
    auVar496._0_4_ = (uint)bVar281 * auVar495._0_4_ | (uint)!bVar281 * 0x40490fdb;
    bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
    auVar496._4_4_ = (uint)bVar281 * auVar495._4_4_ | (uint)!bVar281 * 0x40490fdb;
    bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
    auVar496._8_4_ = (uint)bVar281 * auVar495._8_4_ | (uint)!bVar281 * 0x40490fdb;
    bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
    auVar496._12_4_ = (uint)bVar281 * auVar495._12_4_ | (uint)!bVar281 * 0x40490fdb;
    bVar281 = (bool)((byte)(uVar282 >> 4) & 1);
    auVar496._16_4_ = (uint)bVar281 * auVar495._16_4_ | (uint)!bVar281 * 0x40490fdb;
    bVar281 = (bool)((byte)(uVar282 >> 5) & 1);
    auVar496._20_4_ = (uint)bVar281 * auVar495._20_4_ | (uint)!bVar281 * 0x40490fdb;
    bVar281 = (bool)((byte)(uVar282 >> 6) & 1);
    auVar496._24_4_ = (uint)bVar281 * auVar495._24_4_ | (uint)!bVar281 * 0x40490fdb;
    bVar281 = SUB81(uVar282 >> 7,0);
    auVar496._28_4_ = (uint)bVar281 * auVar495._28_4_ | (uint)!bVar281 * 0x40490fdb;
    auVar95._8_4_ = 0x3fc90fdb;
    auVar95._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar95._12_4_ = 0x3fc90fdb;
    auVar95._16_4_ = 0x3fc90fdb;
    auVar95._20_4_ = 0x3fc90fdb;
    auVar95._24_4_ = 0x3fc90fdb;
    auVar95._28_4_ = 0x3fc90fdb;
    auVar411 = vpord_avx512vl(auVar411,auVar95);
    auVar497._4_4_ = (uint)((byte)(uVar283 >> 1) & 1) * auVar411._4_4_;
    auVar497._0_4_ = (uint)((byte)uVar283 & 1) * auVar411._0_4_;
    auVar497._8_4_ = (uint)((byte)(uVar283 >> 2) & 1) * auVar411._8_4_;
    auVar497._12_4_ = (uint)((byte)(uVar283 >> 3) & 1) * auVar411._12_4_;
    auVar497._16_4_ = (uint)((byte)(uVar283 >> 4) & 1) * auVar411._16_4_;
    auVar497._20_4_ = (uint)((byte)(uVar283 >> 5) & 1) * auVar411._20_4_;
    auVar497._24_4_ = (uint)((byte)(uVar283 >> 6) & 1) * auVar411._24_4_;
    auVar497._28_4_ = (uint)(byte)(uVar283 >> 7) * auVar411._28_4_;
    auVar944._8_4_ = 0x80000000;
    auVar944._0_8_ = 0x8000000080000000;
    auVar944._12_4_ = 0x80000000;
    auVar944._16_4_ = 0x80000000;
    auVar944._20_4_ = 0x80000000;
    auVar944._24_4_ = 0x80000000;
    auVar944._28_4_ = 0x80000000;
    auVar1002._8_4_ = 0x7fffffff;
    auVar1002._0_8_ = 0x7fffffff7fffffff;
    auVar1002._12_4_ = 0x7fffffff;
    auVar1002._16_4_ = 0x7fffffff;
    auVar1002._20_4_ = 0x7fffffff;
    auVar1002._24_4_ = 0x7fffffff;
    auVar1002._28_4_ = 0x7fffffff;
    auVar1060._8_4_ = 0x3f800000;
    auVar1060._0_8_ = 0x3f8000003f800000;
    auVar1060._12_4_ = 0x3f800000;
    auVar1060._16_4_ = 0x3f800000;
    auVar1060._20_4_ = 0x3f800000;
    auVar1060._24_4_ = 0x3f800000;
    auVar1060._28_4_ = 0x3f800000;
    auVar1113._8_4_ = 0xbc83a25c;
    auVar1113._0_8_ = 0xbc83a25cbc83a25c;
    auVar1113._12_4_ = 0xbc83a25c;
    auVar1113._16_4_ = 0xbc83a25c;
    auVar1113._20_4_ = 0xbc83a25c;
    auVar1113._24_4_ = 0xbc83a25c;
    auVar1113._28_4_ = 0xbc83a25c;
    auVar1160._8_4_ = 0xbd99b01e;
    auVar1160._0_8_ = 0xbd99b01ebd99b01e;
    auVar1160._12_4_ = 0xbd99b01e;
    auVar1160._16_4_ = 0xbd99b01e;
    auVar1160._20_4_ = 0xbd99b01e;
    auVar1160._24_4_ = 0xbd99b01e;
    auVar1160._28_4_ = 0xbd99b01e;
    auVar1211._8_4_ = 0xbe117200;
    auVar1211._0_8_ = 0xbe117200be117200;
    auVar1211._12_4_ = 0xbe117200;
    auVar1211._16_4_ = 0xbe117200;
    auVar1211._20_4_ = 0xbe117200;
    auVar1211._24_4_ = 0xbe117200;
    auVar1211._28_4_ = 0xbe117200;
    auVar1263._8_4_ = 0xbeaaaa53;
    auVar1263._0_8_ = 0xbeaaaa53beaaaa53;
    auVar1263._12_4_ = 0xbeaaaa53;
    auVar1263._16_4_ = 0xbeaaaa53;
    auVar1263._20_4_ = 0xbeaaaa53;
    auVar1263._24_4_ = 0xbeaaaa53;
    auVar1263._28_4_ = 0xbeaaaa53;
    auVar1311._8_4_ = 0x3b3ac537;
    auVar1311._0_8_ = 0x3b3ac5373b3ac537;
    auVar1311._12_4_ = 0x3b3ac537;
    auVar1311._16_4_ = 0x3b3ac537;
    auVar1311._20_4_ = 0x3b3ac537;
    auVar1311._24_4_ = 0x3b3ac537;
    auVar1311._28_4_ = 0x3b3ac537;
    auVar1365._8_4_ = 0x3d2edd4e;
    auVar1365._0_8_ = 0x3d2edd4e3d2edd4e;
    auVar1365._12_4_ = 0x3d2edd4e;
    auVar1365._16_4_ = 0x3d2edd4e;
    auVar1365._20_4_ = 0x3d2edd4e;
    auVar1365._24_4_ = 0x3d2edd4e;
    auVar1365._28_4_ = 0x3d2edd4e;
    auVar1419._8_4_ = 0x3dd9ed24;
    auVar1419._0_8_ = 0x3dd9ed243dd9ed24;
    auVar1419._12_4_ = 0x3dd9ed24;
    auVar1419._16_4_ = 0x3dd9ed24;
    auVar1419._20_4_ = 0x3dd9ed24;
    auVar1419._24_4_ = 0x3dd9ed24;
    auVar1419._28_4_ = 0x3dd9ed24;
    auVar1473._8_4_ = 0x3e4cb974;
    auVar1473._0_8_ = 0x3e4cb9743e4cb974;
    auVar1473._12_4_ = 0x3e4cb974;
    auVar1473._16_4_ = 0x3e4cb974;
    auVar1473._20_4_ = 0x3e4cb974;
    auVar1473._24_4_ = 0x3e4cb974;
    auVar1473._28_4_ = 0x3e4cb974;
    auVar1526._8_4_ = 0x3fc90fdb;
    auVar1526._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar1526._12_4_ = 0x3fc90fdb;
    auVar1526._16_4_ = 0x3fc90fdb;
    auVar1526._20_4_ = 0x3fc90fdb;
    auVar1526._24_4_ = 0x3fc90fdb;
    auVar1526._28_4_ = 0x3fc90fdb;
    auVar1579._8_4_ = 0x40490fdb;
    auVar1579._0_8_ = 0x40490fdb40490fdb;
    auVar1579._12_4_ = 0x40490fdb;
    auVar1579._16_4_ = 0x40490fdb;
    auVar1579._20_4_ = 0x40490fdb;
    auVar1579._24_4_ = 0x40490fdb;
    auVar1579._28_4_ = 0x40490fdb;
    auVar411 = vpord_avx512vl(auVar497,auVar1579);
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      auVar495 = *(undefined1 (*) [32])(ptr + uVar279);
      uVar282 = vcmpps_avx512vl(auVar495,auVar444,4);
      uVar282 = uVar283 & uVar282;
      auVar498 = vdivps_avx512vl(auVar558,auVar495);
      vandps_avx512vl(auVar498,auVar1002);
      uVar284 = vcmpps_avx512vl(auVar1060,auVar498,1);
      auVar96._8_4_ = 0xbf800000;
      auVar96._0_8_ = 0xbf800000bf800000;
      auVar96._12_4_ = 0xbf800000;
      auVar96._16_4_ = 0xbf800000;
      auVar96._20_4_ = 0xbf800000;
      auVar96._24_4_ = 0xbf800000;
      auVar96._28_4_ = 0xbf800000;
      auVar499 = vblendmps_avx512vl(auVar498,auVar96);
      bVar11 = (byte)uVar284;
      auVar500._0_4_ =
           (uint)(bVar11 & 1) * auVar499._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM20._0_4_;
      bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
      auVar500._4_4_ = (uint)bVar281 * auVar499._4_4_ | (uint)!bVar281 * in_ZMM20._4_4_;
      bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
      auVar500._8_4_ = (uint)bVar281 * auVar499._8_4_ | (uint)!bVar281 * in_ZMM20._8_4_;
      bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
      auVar500._12_4_ = (uint)bVar281 * auVar499._12_4_ | (uint)!bVar281 * in_ZMM20._12_4_;
      bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
      auVar500._16_4_ = (uint)bVar281 * auVar499._16_4_ | (uint)!bVar281 * in_ZMM20._16_4_;
      bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
      auVar500._20_4_ = (uint)bVar281 * auVar499._20_4_ | (uint)!bVar281 * in_ZMM20._20_4_;
      bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
      auVar500._24_4_ = (uint)bVar281 * auVar499._24_4_ | (uint)!bVar281 * in_ZMM20._24_4_;
      bVar281 = SUB81(uVar284 >> 7,0);
      auVar500._28_4_ = (uint)bVar281 * auVar499._28_4_ | (uint)!bVar281 * in_ZMM20._28_4_;
      uVar285 = vcmpps_avx512vl(auVar495,auVar444,1);
      auVar499 = vdivps_avx512vl(auVar500,auVar498);
      auVar501._0_4_ = (uint)(bVar11 & 1) * auVar499._0_4_ | !(bool)(bVar11 & 1) * auVar500._0_4_;
      bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
      auVar501._4_4_ = (uint)bVar281 * auVar499._4_4_ | !bVar281 * auVar500._4_4_;
      bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
      auVar501._8_4_ = (uint)bVar281 * auVar499._8_4_ | !bVar281 * auVar500._8_4_;
      bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
      auVar501._12_4_ = (uint)bVar281 * auVar499._12_4_ | !bVar281 * auVar500._12_4_;
      bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
      auVar501._16_4_ = (uint)bVar281 * auVar499._16_4_ | !bVar281 * auVar500._16_4_;
      bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
      auVar501._20_4_ = (uint)bVar281 * auVar499._20_4_ | !bVar281 * auVar500._20_4_;
      bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
      auVar501._24_4_ = (uint)bVar281 * auVar499._24_4_ | !bVar281 * auVar500._24_4_;
      bVar281 = SUB81(uVar284 >> 7,0);
      auVar501._28_4_ = (uint)bVar281 * auVar499._28_4_ | !bVar281 * auVar500._28_4_;
      in_ZMM20 = ZEXT3264(auVar501);
      auVar499 = vmulps_avx512vl(auVar501,auVar501);
      auVar502 = vmulps_avx512vl(auVar499,auVar499);
      auVar503 = vfmadd213ps_avx512vl(auVar1113,auVar502,auVar1160);
      auVar503 = vfmadd213ps_avx512vl(auVar503,auVar502,auVar1211);
      auVar503 = vfmadd213ps_avx512vl(auVar503,auVar502,auVar1263);
      auVar504 = vfmadd213ps_avx512vl(auVar1311,auVar502,auVar1365);
      auVar504 = vfmadd213ps_avx512vl(auVar504,auVar502,auVar1419);
      auVar504 = vfmadd213ps_avx512vl(auVar504,auVar502,auVar1473);
      auVar502 = vfmadd213ps_avx512vl(auVar504,auVar502,auVar1060);
      auVar499 = vfmadd231ps_avx512vl(auVar502,auVar499,auVar503);
      auVar499 = vmulps_avx512vl(auVar499,auVar501);
      auVar502 = vaddps_avx512vl(auVar499,auVar1526);
      auVar505._0_4_ =
           (uint)(bVar11 & 1) * auVar502._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar499._0_4_;
      bVar281 = (bool)((byte)(uVar284 >> 1) & 1);
      auVar505._4_4_ = (uint)bVar281 * auVar502._4_4_ | (uint)!bVar281 * auVar499._4_4_;
      bVar281 = (bool)((byte)(uVar284 >> 2) & 1);
      auVar505._8_4_ = (uint)bVar281 * auVar502._8_4_ | (uint)!bVar281 * auVar499._8_4_;
      bVar281 = (bool)((byte)(uVar284 >> 3) & 1);
      auVar505._12_4_ = (uint)bVar281 * auVar502._12_4_ | (uint)!bVar281 * auVar499._12_4_;
      bVar281 = (bool)((byte)(uVar284 >> 4) & 1);
      auVar505._16_4_ = (uint)bVar281 * auVar502._16_4_ | (uint)!bVar281 * auVar499._16_4_;
      bVar281 = (bool)((byte)(uVar284 >> 5) & 1);
      auVar505._20_4_ = (uint)bVar281 * auVar502._20_4_ | (uint)!bVar281 * auVar499._20_4_;
      bVar281 = (bool)((byte)(uVar284 >> 6) & 1);
      auVar505._24_4_ = (uint)bVar281 * auVar502._24_4_ | (uint)!bVar281 * auVar499._24_4_;
      bVar281 = SUB81(uVar284 >> 7,0);
      auVar505._28_4_ = (uint)bVar281 * auVar502._28_4_ | (uint)!bVar281 * auVar499._28_4_;
      auVar498 = vpternlogd_avx512vl(auVar505,auVar498,auVar944,0xf8);
      auVar495 = vpternlogd_avx512vl(auVar495,auVar1579,auVar944,0xec);
      uVar1600 = vcmpps_avx512vl(auVar444,auVar495,2);
      bVar11 = (byte)uVar283 | (byte)uVar1600;
      auVar499 = vpblendmd_avx512vl(auVar411,auVar497);
      bVar13 = (bool)(bVar11 >> 1 & 1);
      bVar16 = (bool)(bVar11 >> 2 & 1);
      bVar19 = (bool)(bVar11 >> 3 & 1);
      bVar22 = (bool)(bVar11 >> 4 & 1);
      bVar25 = (bool)(bVar11 >> 5 & 1);
      bVar26 = (bool)(bVar11 >> 6 & 1);
      auVar502 = vaddps_avx512vl(auVar498,auVar496);
      bVar281 = (bool)((byte)uVar285 & 1);
      bVar14 = (bool)((byte)(uVar285 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar285 >> 2) & 1);
      bVar20 = (bool)((byte)(uVar285 >> 3) & 1);
      bVar23 = (bool)((byte)(uVar285 >> 4) & 1);
      bVar29 = (bool)((byte)(uVar285 >> 5) & 1);
      bVar27 = (bool)((byte)(uVar285 >> 6) & 1);
      bVar31 = SUB81(uVar285 >> 7,0);
      bVar12 = (bool)((byte)uVar282 & 1);
      bVar15 = (bool)((byte)(uVar282 >> 1) & 1);
      bVar18 = (bool)((byte)(uVar282 >> 2) & 1);
      bVar21 = (bool)((byte)(uVar282 >> 3) & 1);
      bVar24 = (bool)((byte)(uVar282 >> 4) & 1);
      bVar30 = (bool)((byte)(uVar282 >> 5) & 1);
      bVar28 = (bool)((byte)(uVar282 >> 6) & 1);
      bVar32 = SUB81(uVar282 >> 7,0);
      pfVar1599 = outptr + uVar279;
      *pfVar1599 = (float)((uint)bVar12 *
                           ((uint)bVar281 * auVar502._0_4_ | (uint)!bVar281 * auVar498._0_4_) |
                          (uint)!bVar12 *
                          ((uint)(bVar11 & 1) * auVar499._0_4_ |
                          (uint)!(bool)(bVar11 & 1) * auVar495._0_4_));
      pfVar1599[1] = (float)((uint)bVar15 *
                             ((uint)bVar14 * auVar502._4_4_ | (uint)!bVar14 * auVar498._4_4_) |
                            (uint)!bVar15 *
                            ((uint)bVar13 * auVar499._4_4_ | (uint)!bVar13 * auVar495._4_4_));
      pfVar1599[2] = (float)((uint)bVar18 *
                             ((uint)bVar17 * auVar502._8_4_ | (uint)!bVar17 * auVar498._8_4_) |
                            (uint)!bVar18 *
                            ((uint)bVar16 * auVar499._8_4_ | (uint)!bVar16 * auVar495._8_4_));
      pfVar1599[3] = (float)((uint)bVar21 *
                             ((uint)bVar20 * auVar502._12_4_ | (uint)!bVar20 * auVar498._12_4_) |
                            (uint)!bVar21 *
                            ((uint)bVar19 * auVar499._12_4_ | (uint)!bVar19 * auVar495._12_4_));
      pfVar1599[4] = (float)((uint)bVar24 *
                             ((uint)bVar23 * auVar502._16_4_ | (uint)!bVar23 * auVar498._16_4_) |
                            (uint)!bVar24 *
                            ((uint)bVar22 * auVar499._16_4_ | (uint)!bVar22 * auVar495._16_4_));
      pfVar1599[5] = (float)((uint)bVar30 *
                             ((uint)bVar29 * auVar502._20_4_ | (uint)!bVar29 * auVar498._20_4_) |
                            (uint)!bVar30 *
                            ((uint)bVar25 * auVar499._20_4_ | (uint)!bVar25 * auVar495._20_4_));
      pfVar1599[6] = (float)((uint)bVar28 *
                             ((uint)bVar27 * auVar502._24_4_ | (uint)!bVar27 * auVar498._24_4_) |
                            (uint)!bVar28 *
                            ((uint)bVar26 * auVar499._24_4_ | (uint)!bVar26 * auVar495._24_4_));
      pfVar1599[7] = (float)((uint)bVar32 *
                             ((uint)bVar31 * auVar502._28_4_ | (uint)!bVar31 * auVar498._28_4_) |
                            (uint)!bVar32 *
                            ((uint)(bVar11 >> 7) * auVar499._28_4_ |
                            (uint)!(bool)(bVar11 >> 7) * auVar495._28_4_));
    }
    auVar35._8_4_ = 0x80000000;
    auVar35._0_8_ = 0x8000000080000000;
    auVar35._12_4_ = 0x80000000;
    auVar350 = vpandd_avx512vl(auVar287,auVar35);
    uVar283 = vcmpps_avx512vl(auVar287,(undefined1  [16])0x0,4);
    uVar282 = vcmpps_avx512vl(auVar287,(undefined1  [16])0x0,1);
    auVar351 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
    bVar281 = (bool)((byte)uVar282 & 1);
    auVar352._0_4_ = (uint)bVar281 * auVar351._0_4_ | (uint)!bVar281 * 0x40490fdb;
    bVar281 = (bool)((byte)(uVar282 >> 1) & 1);
    auVar352._4_4_ = (uint)bVar281 * auVar351._4_4_ | (uint)!bVar281 * 0x40490fdb;
    bVar281 = (bool)((byte)(uVar282 >> 2) & 1);
    auVar352._8_4_ = (uint)bVar281 * auVar351._8_4_ | (uint)!bVar281 * 0x40490fdb;
    bVar281 = (bool)((byte)(uVar282 >> 3) & 1);
    auVar352._12_4_ = (uint)bVar281 * auVar351._12_4_ | (uint)!bVar281 * 0x40490fdb;
    auVar36._8_4_ = 0x3fc90fdb;
    auVar36._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar36._12_4_ = 0x3fc90fdb;
    auVar350 = vpord_avx512vl(auVar350,auVar36);
    auVar353._4_4_ = (uint)((byte)(uVar283 >> 1) & 1) * auVar350._4_4_;
    auVar353._0_4_ = (uint)((byte)uVar283 & 1) * auVar350._0_4_;
    auVar353._8_4_ = (uint)((byte)(uVar283 >> 2) & 1) * auVar350._8_4_;
    auVar353._12_4_ = (uint)((byte)(uVar283 >> 3) & 1) * auVar350._12_4_;
    auVar920._8_4_ = 0x80000000;
    auVar920._0_8_ = 0x8000000080000000;
    auVar920._12_4_ = 0x80000000;
    auVar975._8_4_ = 0x7fffffff;
    auVar975._0_8_ = 0x7fffffff7fffffff;
    auVar975._12_4_ = 0x7fffffff;
    auVar1031._8_4_ = 0x3f800000;
    auVar1031._0_8_ = 0x3f8000003f800000;
    auVar1031._12_4_ = 0x3f800000;
    auVar1086._8_4_ = 0xbc83a25c;
    auVar1086._0_8_ = 0xbc83a25cbc83a25c;
    auVar1086._12_4_ = 0xbc83a25c;
    auVar1139._8_4_ = 0xbd99b01e;
    auVar1139._0_8_ = 0xbd99b01ebd99b01e;
    auVar1139._12_4_ = 0xbd99b01e;
    auVar1186._8_4_ = 0xbe117200;
    auVar1186._0_8_ = 0xbe117200be117200;
    auVar1186._12_4_ = 0xbe117200;
    auVar1236._8_4_ = 0xbeaaaa53;
    auVar1236._0_8_ = 0xbeaaaa53beaaaa53;
    auVar1236._12_4_ = 0xbeaaaa53;
    auVar1284._8_4_ = 0x3b3ac537;
    auVar1284._0_8_ = 0x3b3ac5373b3ac537;
    auVar1284._12_4_ = 0x3b3ac537;
    auVar1338._8_4_ = 0x3d2edd4e;
    auVar1338._0_8_ = 0x3d2edd4e3d2edd4e;
    auVar1338._12_4_ = 0x3d2edd4e;
    auVar1392._8_4_ = 0x3dd9ed24;
    auVar1392._0_8_ = 0x3dd9ed243dd9ed24;
    auVar1392._12_4_ = 0x3dd9ed24;
    auVar1446._8_4_ = 0x3e4cb974;
    auVar1446._0_8_ = 0x3e4cb9743e4cb974;
    auVar1446._12_4_ = 0x3e4cb974;
    auVar1499._8_4_ = 0x3fc90fdb;
    auVar1499._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar1499._12_4_ = 0x3fc90fdb;
    auVar1552._8_4_ = 0x40490fdb;
    auVar1552._0_8_ = 0x40490fdb40490fdb;
    auVar1552._12_4_ = 0x40490fdb;
    auVar350 = vpord_avx512vl(auVar353,auVar1552);
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      auVar351 = *(undefined1 (*) [16])(ptr + uVar279);
      uVar282 = vcmpps_avx512vl(auVar351,(undefined1  [16])0x0,4);
      uVar282 = uVar283 & uVar282;
      uVar284 = vcmpps_avx512vl(auVar351,(undefined1  [16])0x0,1);
      auVar354 = vdivps_avx512vl(auVar287,auVar351);
      auVar355 = vandps_avx512vl(auVar354,auVar975);
      uVar285 = vcmpps_avx512vl(auVar1031,auVar355,1);
      auVar37._8_4_ = 0xbf800000;
      auVar37._0_8_ = 0xbf800000bf800000;
      auVar37._12_4_ = 0xbf800000;
      auVar356 = vblendmps_avx512vl(auVar355,auVar37);
      bVar11 = (byte)uVar285;
      auVar357._0_4_ =
           (uint)(bVar11 & 1) * auVar356._0_4_ | (uint)!(bool)(bVar11 & 1) * in_ZMM20._0_4_;
      bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
      auVar357._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * in_ZMM20._4_4_;
      bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
      auVar357._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * in_ZMM20._8_4_;
      bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
      auVar357._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * in_ZMM20._12_4_;
      auVar355 = vdivps_avx512vl(auVar357,auVar355);
      auVar358._0_4_ = (uint)(bVar11 & 1) * auVar355._0_4_ | !(bool)(bVar11 & 1) * auVar357._0_4_;
      bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
      auVar358._4_4_ = (uint)bVar281 * auVar355._4_4_ | !bVar281 * auVar357._4_4_;
      bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
      auVar358._8_4_ = (uint)bVar281 * auVar355._8_4_ | !bVar281 * auVar357._8_4_;
      bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
      auVar358._12_4_ = (uint)bVar281 * auVar355._12_4_ | !bVar281 * auVar357._12_4_;
      in_ZMM20 = ZEXT1664(auVar358);
      auVar355 = vmulps_avx512vl(auVar358,auVar358);
      auVar356 = vmulps_avx512vl(auVar355,auVar355);
      auVar359 = vfmadd213ps_avx512vl(auVar1086,auVar356,auVar1139);
      auVar359 = vfmadd213ps_avx512vl(auVar359,auVar356,auVar1186);
      auVar359 = vfmadd213ps_avx512vl(auVar359,auVar356,auVar1236);
      auVar360 = vfmadd213ps_avx512vl(auVar1284,auVar356,auVar1338);
      auVar360 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1392);
      auVar360 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1446);
      auVar356 = vfmadd213ps_avx512vl(auVar360,auVar356,auVar1031);
      auVar355 = vfmadd231ps_avx512vl(auVar356,auVar355,auVar359);
      auVar355 = vmulps_avx512vl(auVar355,auVar358);
      auVar356 = vaddps_avx512vl(auVar355,auVar1499);
      auVar361._0_4_ =
           (uint)(bVar11 & 1) * auVar356._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar355._0_4_;
      bVar281 = (bool)((byte)(uVar285 >> 1) & 1);
      auVar361._4_4_ = (uint)bVar281 * auVar356._4_4_ | (uint)!bVar281 * auVar355._4_4_;
      bVar281 = (bool)((byte)(uVar285 >> 2) & 1);
      auVar361._8_4_ = (uint)bVar281 * auVar356._8_4_ | (uint)!bVar281 * auVar355._8_4_;
      bVar281 = (bool)((byte)(uVar285 >> 3) & 1);
      auVar361._12_4_ = (uint)bVar281 * auVar356._12_4_ | (uint)!bVar281 * auVar355._12_4_;
      auVar354 = vpternlogd_avx512vl(auVar361,auVar354,auVar920,0xf8);
      auVar351 = vpternlogd_avx512vl(auVar351,auVar1552,auVar920,0xec);
      uVar1600 = vcmpps_avx512vl((undefined1  [16])0x0,auVar351,2);
      uVar34 = (ushort)uVar283 | (ushort)uVar1600;
      auVar355 = vpblendmd_avx512vl(auVar350,auVar353);
      bVar281 = (bool)((byte)uVar34 & 1);
      bVar14 = (bool)((byte)(uVar34 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar34 >> 2) & 1);
      bVar20 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar356 = vaddps_avx512vl(auVar354,auVar352);
      bVar12 = (bool)((byte)uVar284 & 1);
      bVar15 = (bool)((byte)(uVar284 >> 1) & 1);
      bVar18 = (bool)((byte)(uVar284 >> 2) & 1);
      bVar21 = (bool)((byte)(uVar284 >> 3) & 1);
      bVar13 = (bool)((byte)uVar282 & 1);
      bVar16 = (bool)((byte)(uVar282 >> 1) & 1);
      bVar19 = (bool)((byte)(uVar282 >> 2) & 1);
      bVar22 = (bool)((byte)(uVar282 >> 3) & 1);
      pfVar1599 = outptr + uVar279;
      *pfVar1599 = (float)((uint)bVar13 *
                           ((uint)bVar12 * auVar356._0_4_ | (uint)!bVar12 * auVar354._0_4_) |
                          (uint)!bVar13 *
                          ((uint)bVar281 * auVar355._0_4_ | (uint)!bVar281 * auVar351._0_4_));
      pfVar1599[1] = (float)((uint)bVar16 *
                             ((uint)bVar15 * auVar356._4_4_ | (uint)!bVar15 * auVar354._4_4_) |
                            (uint)!bVar16 *
                            ((uint)bVar14 * auVar355._4_4_ | (uint)!bVar14 * auVar351._4_4_));
      pfVar1599[2] = (float)((uint)bVar19 *
                             ((uint)bVar18 * auVar356._8_4_ | (uint)!bVar18 * auVar354._8_4_) |
                            (uint)!bVar19 *
                            ((uint)bVar17 * auVar355._8_4_ | (uint)!bVar17 * auVar351._8_4_));
      pfVar1599[3] = (float)((uint)bVar22 *
                             ((uint)bVar21 * auVar356._12_4_ | (uint)!bVar21 * auVar354._12_4_) |
                            (uint)!bVar22 *
                            ((uint)bVar20 * auVar355._12_4_ | (uint)!bVar20 * auVar351._12_4_));
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      pfVar1599 = outptr;
      fVar667 = atan2f(fVar666,*(float *)((long)ptr + uVar279 * 4 + lVar280));
      *(float *)((long)outptr + uVar279 * 4 + lVar280) = fVar667;
      lVar280 = lVar280 + 4;
      outptr = pfVar1599;
    }
    return;
  }
  iVar278 = bw;
  if (bw < aw) {
    iVar278 = aw;
  }
  iVar276 = bp;
  if (bp < ap) {
    iVar276 = ap;
  }
  iVar277 = iVar276 * iVar278;
  if (ap != bp) {
LAB_003815a3:
    if (bp != 1) {
      return;
    }
    if (aw == bw) {
      if (iVar276 == 0x10) {
        iVar277 = 0;
        if (0 < iVar278) {
          iVar277 = iVar278;
        }
        while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
          auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar1594 = vaddps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
        }
      }
      if (iVar276 == 8) {
        for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
          fVar666 = *ptr1;
          fVar667 = ptr1[1];
          auVar778._4_4_ = fVar667;
          auVar778._0_4_ = fVar667;
          auVar778._8_4_ = fVar667;
          auVar778._12_4_ = fVar667;
          auVar778._16_4_ = fVar667;
          auVar778._20_4_ = fVar667;
          auVar778._24_4_ = fVar667;
          auVar778._28_4_ = fVar667;
          auVar1594 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar778,
                                 1);
          auVar1594 = vaddps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar1594;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
        }
        for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
          fVar666 = *ptr1;
          fVar667 = *(float *)(*(undefined1 (*) [64])ptr + 4);
          fVar1604 = *(float *)(*(undefined1 (*) [64])ptr + 8);
          fVar730 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          fVar233 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          fVar234 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          fVar729 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          fVar235 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
          *(float *)*(undefined1 (*) [64])outptr = fVar666 + *(float *)*(undefined1 (*) [64])ptr;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar666 + fVar667;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar666 + fVar1604;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar666 + fVar730;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar666 + fVar233;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar666 + fVar234;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar666 + fVar729;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar666 + fVar235;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        }
      }
      if (iVar276 != 4) {
        return;
      }
      for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
        fVar666 = ptr1[uVar279 + 3];
        auVar695._20_4_ = fVar666;
        auVar695._16_4_ = fVar666;
        auVar695._24_4_ = fVar666;
        auVar695._28_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 2];
        auVar695._4_4_ = fVar666;
        auVar695._0_4_ = fVar666;
        auVar695._8_4_ = fVar666;
        auVar695._12_4_ = fVar666;
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        auVar1594 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(
                                                  fVar666,fVar666))),
                                                  CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(
                                                  fVar667,fVar667))))),auVar695,1);
        auVar1594 = vaddps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])outptr = auVar1594;
        ptr = (float *)((long)ptr + 0x40);
        outptr = (float *)((long)outptr + 0x40);
      }
      for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
        fVar666 = ptr1[uVar279 + 1];
        fVar667 = ptr1[uVar279];
        fVar1604 = *(float *)(*(undefined1 (*) [64])ptr + 4);
        fVar730 = *(float *)(*(undefined1 (*) [64])ptr + 8);
        fVar233 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        fVar234 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
        fVar729 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
        fVar235 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
        fVar236 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
        *(float *)*(undefined1 (*) [64])outptr = fVar667 + *(float *)*(undefined1 (*) [64])ptr;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar667 + fVar1604;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar667 + fVar730;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar667 + fVar233;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar666 + fVar234;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar666 + fVar729;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar666 + fVar235;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar666 + fVar236;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
      lVar280 = 0;
      for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278;
          uVar283 = (ulong)((int)uVar283 + 1)) {
        fVar666 = *(float *)((long)ptr1 + uVar279 * 4 + lVar280);
        pfVar1599 = (float *)(*(undefined1 (*) [64])ptr + lVar280 * 4);
        fVar667 = pfVar1599[1];
        fVar1604 = pfVar1599[2];
        fVar730 = pfVar1599[3];
        pfVar1601 = (float *)((long)*(undefined1 (*) [64])outptr + lVar280 * 4);
        *pfVar1601 = fVar666 + *pfVar1599;
        pfVar1601[1] = fVar666 + fVar667;
        pfVar1601[2] = fVar666 + fVar1604;
        pfVar1601[3] = fVar666 + fVar730;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (bw == 1) {
      auVar1594 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
      for (iVar278 = 0xf; iVar278 < iVar277; iVar278 = iVar278 + 0x10) {
        auVar1595 = vaddps_avx512f(auVar1594,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])outptr = auVar1595;
        ptr = (float *)((long)ptr + 0x40);
        outptr = (float *)((long)outptr + 0x40);
      }
      fVar666 = *ptr1;
      for (iVar278 = iVar278 + -0xc; iVar278 + 4 < iVar277; iVar278 = iVar278 + 8) {
        fVar667 = *(float *)(*(undefined1 (*) [64])ptr + 4);
        fVar1604 = *(float *)(*(undefined1 (*) [64])ptr + 8);
        fVar730 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        fVar233 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
        fVar234 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
        fVar729 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
        fVar235 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
        *(float *)*(undefined1 (*) [64])outptr = fVar666 + *(float *)*(undefined1 (*) [64])ptr;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar666 + fVar667;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar666 + fVar1604;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar666 + fVar730;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar666 + fVar233;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar666 + fVar234;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar666 + fVar729;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar666 + fVar235;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
      fVar666 = *ptr1;
      lVar280 = 0;
      for (; iVar278 < iVar277; iVar278 = iVar278 + 4) {
        pfVar1599 = (float *)(*(undefined1 (*) [64])ptr + lVar280 * 4);
        fVar667 = pfVar1599[1];
        fVar1604 = pfVar1599[2];
        fVar730 = pfVar1599[3];
        pfVar1601 = (float *)((long)*(undefined1 (*) [64])outptr + lVar280 * 4);
        *pfVar1601 = fVar666 + *pfVar1599;
        pfVar1601[1] = fVar666 + fVar667;
        pfVar1601[2] = fVar666 + fVar1604;
        pfVar1601[3] = fVar666 + fVar730;
        lVar280 = lVar280 + 4;
      }
      return;
    }
    if (aw != 1) {
      return;
    }
    if (iVar276 == 0x10) {
      auVar1594 = *(undefined1 (*) [64])ptr;
      iVar277 = iVar278;
      while (bVar281 = iVar277 != 0, iVar277 = iVar277 + -1, bVar281) {
        fVar666 = *ptr1;
        auVar185._4_4_ = fVar666;
        auVar185._0_4_ = fVar666;
        auVar185._8_4_ = fVar666;
        auVar185._12_4_ = fVar666;
        auVar185._16_4_ = fVar666;
        auVar185._20_4_ = fVar666;
        auVar185._24_4_ = fVar666;
        auVar185._28_4_ = fVar666;
        auVar185._32_4_ = fVar666;
        auVar185._36_4_ = fVar666;
        auVar185._40_4_ = fVar666;
        auVar185._44_4_ = fVar666;
        auVar185._48_4_ = fVar666;
        auVar185._52_4_ = fVar666;
        auVar185._56_4_ = fVar666;
        auVar185._60_4_ = fVar666;
        auVar1595 = vaddps_avx512f(auVar1594,auVar185);
        *(undefined1 (*) [64])outptr = auVar1595;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
      }
    }
    if (iVar276 == 8) {
      auVar1594 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
      for (iVar277 = 0; iVar277 + 1 < iVar278; iVar277 = iVar277 + 2) {
        fVar666 = *ptr1;
        fVar667 = ptr1[1];
        auVar875._4_4_ = fVar667;
        auVar875._0_4_ = fVar667;
        auVar875._8_4_ = fVar667;
        auVar875._12_4_ = fVar667;
        auVar875._16_4_ = fVar667;
        auVar875._20_4_ = fVar667;
        auVar875._24_4_ = fVar667;
        auVar875._28_4_ = fVar667;
        auVar1595 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT428(fVar666,CONCAT424(fVar666,CONCAT420(fVar666,
                                                  CONCAT416(fVar666,CONCAT412(fVar666,CONCAT48(
                                                  fVar666,CONCAT44(fVar666,fVar666)))))))),auVar875,
                               1);
        auVar1595 = vaddps_avx512f(auVar1595,auVar1594);
        *(undefined1 (*) [64])outptr = auVar1595;
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)outptr + 0x40);
      }
      for (; iVar277 < iVar278; iVar277 = iVar277 + 1) {
        fVar666 = *ptr1;
        auVar177._4_4_ = fVar666;
        auVar177._0_4_ = fVar666;
        auVar177._8_4_ = fVar666;
        auVar177._12_4_ = fVar666;
        auVar177._16_4_ = fVar666;
        auVar177._20_4_ = fVar666;
        auVar177._24_4_ = fVar666;
        auVar177._28_4_ = fVar666;
        auVar411 = vaddps_avx512vl(auVar1594._0_32_,auVar177);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar411;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      }
    }
    if (iVar276 != 4) {
      return;
    }
    auVar1594 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
    auVar287 = auVar1594._0_16_;
    auVar350 = ZEXT116(0) * auVar287 + ZEXT116(1) * auVar287;
    auVar351 = ZEXT116(0) * auVar1594._16_16_ + ZEXT116(1) * auVar287;
    for (uVar279 = 0; (int)uVar279 + 3 < iVar278; uVar279 = uVar279 + 4) {
      fVar666 = ptr1[uVar279 + 3];
      auVar876._20_4_ = fVar666;
      auVar876._16_4_ = fVar666;
      auVar876._24_4_ = fVar666;
      auVar876._28_4_ = fVar666;
      fVar666 = ptr1[uVar279 + 2];
      auVar876._4_4_ = fVar666;
      auVar876._0_4_ = fVar666;
      auVar876._8_4_ = fVar666;
      auVar876._12_4_ = fVar666;
      fVar666 = ptr1[uVar279 + 1];
      fVar667 = ptr1[uVar279];
      auVar1595 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT1616(CONCAT412(fVar666,CONCAT48(fVar666,CONCAT44(fVar666
                                                  ,fVar666))),
                                                 CONCAT412(fVar667,CONCAT48(fVar667,CONCAT44(fVar667
                                                  ,fVar667))))),auVar876,1);
      auVar1595 = vaddps_avx512f(auVar1595,auVar1594);
      *(undefined1 (*) [64])outptr = auVar1595;
      outptr = (float *)((long)outptr + 0x40);
    }
    for (; (int)uVar279 + 1 < iVar278; uVar279 = uVar279 + 2) {
      fVar666 = ptr1[uVar279 + 1];
      fVar667 = ptr1[uVar279];
      *(float *)*(undefined1 (*) [64])outptr = fVar667 + auVar350._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar667 + auVar350._4_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar667 + auVar350._8_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar667 + auVar350._12_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar666 + auVar351._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar666 + auVar351._4_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar666 + auVar351._8_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar666 + auVar351._12_4_;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar278; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      uVar1603 = *(undefined4 *)((long)ptr1 + uVar279 * 4 + lVar280);
      auVar93._4_4_ = uVar1603;
      auVar93._0_4_ = uVar1603;
      auVar93._8_4_ = uVar1603;
      auVar93._12_4_ = uVar1603;
      auVar350 = vaddps_avx512vl(auVar287,auVar93);
      *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar280 * 4) = auVar350;
      lVar280 = lVar280 + 4;
    }
    return;
  }
  if (aw == bw) {
    for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar1594 = vaddps_avx512f(*(undefined1 (*) [64])(ptr1 + uVar279),
                                 *(undefined1 (*) [64])(ptr + uVar279));
      *(undefined1 (*) [64])(outptr + uVar279) = auVar1594;
    }
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      pfVar1599 = ptr1 + uVar279;
      fVar666 = pfVar1599[1];
      fVar667 = pfVar1599[2];
      fVar1604 = pfVar1599[3];
      fVar730 = pfVar1599[4];
      fVar233 = pfVar1599[5];
      fVar234 = pfVar1599[6];
      fVar729 = pfVar1599[7];
      pfVar1601 = ptr + uVar279;
      fVar235 = pfVar1601[1];
      fVar236 = pfVar1601[2];
      fVar237 = pfVar1601[3];
      fVar238 = pfVar1601[4];
      fVar239 = pfVar1601[5];
      fVar240 = pfVar1601[6];
      fVar241 = pfVar1601[7];
      pfVar9 = outptr + uVar279;
      *pfVar9 = *pfVar1599 + *pfVar1601;
      pfVar9[1] = fVar666 + fVar235;
      pfVar9[2] = fVar667 + fVar236;
      pfVar9[3] = fVar1604 + fVar237;
      pfVar9[4] = fVar730 + fVar238;
      pfVar9[5] = fVar233 + fVar239;
      pfVar9[6] = fVar234 + fVar240;
      pfVar9[7] = fVar729 + fVar241;
    }
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      pfVar1599 = ptr1 + uVar279;
      fVar666 = pfVar1599[1];
      fVar667 = pfVar1599[2];
      fVar1604 = pfVar1599[3];
      pfVar1601 = ptr + uVar279;
      fVar730 = pfVar1601[1];
      fVar233 = pfVar1601[2];
      fVar234 = pfVar1601[3];
      pfVar9 = outptr + uVar279;
      *pfVar9 = *pfVar1599 + *pfVar1601;
      pfVar9[1] = fVar666 + fVar730;
      pfVar9[2] = fVar667 + fVar233;
      pfVar9[3] = fVar1604 + fVar234;
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      *(float *)((long)outptr + uVar279 * 4 + lVar280) =
           *(float *)((long)ptr1 + uVar279 * 4 + lVar280) +
           *(float *)((long)ptr + uVar279 * 4 + lVar280);
      lVar280 = lVar280 + 4;
    }
    return;
  }
  if (bw != 1) {
    if (aw != 1) goto LAB_003815a3;
    fVar666 = *ptr;
    if (iVar276 == 4) {
      auVar755 = *(undefined1 (*) [16])ptr;
      auVar1594 = ZEXT3264(CONCAT1616(auVar755,auVar755));
    }
    else {
      auVar755._4_4_ = fVar666;
      auVar755._0_4_ = fVar666;
      auVar755._8_4_ = fVar666;
      auVar755._12_4_ = fVar666;
      if (iVar276 == 8) {
        auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr);
      }
      else {
        auVar904._4_4_ = fVar666;
        auVar904._0_4_ = fVar666;
        auVar904._8_4_ = fVar666;
        auVar904._12_4_ = fVar666;
        auVar904._16_4_ = fVar666;
        auVar904._20_4_ = fVar666;
        auVar904._24_4_ = fVar666;
        auVar904._28_4_ = fVar666;
        auVar1594 = ZEXT3264(auVar904);
        if (iVar276 == 0x10) {
          auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
          goto LAB_0038b653;
        }
      }
    }
    auVar904 = auVar1594._0_32_;
    auVar1594 = vinserti64x4_avx512f(auVar1594,auVar904,1);
LAB_0038b653:
    for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
      auVar1595 = vaddps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr1 + uVar279));
      *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
    }
    for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
      pfVar1599 = ptr1 + uVar279;
      fVar667 = pfVar1599[1];
      fVar1604 = pfVar1599[2];
      fVar730 = pfVar1599[3];
      fVar233 = pfVar1599[4];
      fVar234 = pfVar1599[5];
      fVar729 = pfVar1599[6];
      fVar235 = pfVar1599[7];
      pfVar1601 = outptr + uVar279;
      *pfVar1601 = auVar904._0_4_ + *pfVar1599;
      pfVar1601[1] = auVar904._4_4_ + fVar667;
      pfVar1601[2] = auVar904._8_4_ + fVar1604;
      pfVar1601[3] = auVar904._12_4_ + fVar730;
      pfVar1601[4] = auVar904._16_4_ + fVar233;
      pfVar1601[5] = auVar904._20_4_ + fVar234;
      pfVar1601[6] = auVar904._24_4_ + fVar729;
      pfVar1601[7] = auVar904._28_4_ + fVar235;
    }
    for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
      pfVar1599 = ptr1 + uVar279;
      fVar667 = pfVar1599[1];
      fVar1604 = pfVar1599[2];
      fVar730 = pfVar1599[3];
      pfVar1601 = outptr + uVar279;
      *pfVar1601 = auVar755._0_4_ + *pfVar1599;
      pfVar1601[1] = auVar755._4_4_ + fVar667;
      pfVar1601[2] = auVar755._8_4_ + fVar1604;
      pfVar1601[3] = auVar755._12_4_ + fVar730;
    }
    lVar280 = 0;
    for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1)
        ) {
      *(float *)((long)outptr + uVar279 * 4 + lVar280) =
           fVar666 + *(float *)((long)ptr1 + uVar279 * 4 + lVar280);
      lVar280 = lVar280 + 4;
    }
    return;
  }
  fVar666 = *ptr1;
  if (iVar276 == 4) {
    auVar744 = *(undefined1 (*) [16])ptr1;
    auVar1594 = ZEXT3264(CONCAT1616(auVar744,auVar744));
  }
  else {
    auVar744._4_4_ = fVar666;
    auVar744._0_4_ = fVar666;
    auVar744._8_4_ = fVar666;
    auVar744._12_4_ = fVar666;
    if (iVar276 == 8) {
      auVar1594 = ZEXT3264(*(undefined1 (*) [32])ptr1);
    }
    else {
      auVar886._4_4_ = fVar666;
      auVar886._0_4_ = fVar666;
      auVar886._8_4_ = fVar666;
      auVar886._12_4_ = fVar666;
      auVar886._16_4_ = fVar666;
      auVar886._20_4_ = fVar666;
      auVar886._24_4_ = fVar666;
      auVar886._28_4_ = fVar666;
      auVar1594 = ZEXT3264(auVar886);
      if (iVar276 == 0x10) {
        auVar1594 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
        goto LAB_003879b7;
      }
    }
  }
  auVar886 = auVar1594._0_32_;
  auVar1594 = vinserti64x4_avx512f(auVar1594,auVar886,1);
LAB_003879b7:
  for (uVar279 = 0; (int)uVar279 + 0xf < iVar277; uVar279 = uVar279 + 0x10) {
    auVar1595 = vaddps_avx512f(auVar1594,*(undefined1 (*) [64])(ptr + uVar279));
    *(undefined1 (*) [64])(outptr + uVar279) = auVar1595;
  }
  for (; (int)uVar279 + 7 < iVar277; uVar279 = uVar279 + 8) {
    pfVar1599 = ptr + uVar279;
    fVar667 = pfVar1599[1];
    fVar1604 = pfVar1599[2];
    fVar730 = pfVar1599[3];
    fVar233 = pfVar1599[4];
    fVar234 = pfVar1599[5];
    fVar729 = pfVar1599[6];
    fVar235 = pfVar1599[7];
    pfVar1601 = outptr + uVar279;
    *pfVar1601 = auVar886._0_4_ + *pfVar1599;
    pfVar1601[1] = auVar886._4_4_ + fVar667;
    pfVar1601[2] = auVar886._8_4_ + fVar1604;
    pfVar1601[3] = auVar886._12_4_ + fVar730;
    pfVar1601[4] = auVar886._16_4_ + fVar233;
    pfVar1601[5] = auVar886._20_4_ + fVar234;
    pfVar1601[6] = auVar886._24_4_ + fVar729;
    pfVar1601[7] = auVar886._28_4_ + fVar235;
  }
  for (; (int)uVar279 + 3 < iVar277; uVar279 = uVar279 + 4) {
    pfVar1599 = ptr + uVar279;
    fVar667 = pfVar1599[1];
    fVar1604 = pfVar1599[2];
    fVar730 = pfVar1599[3];
    pfVar1601 = outptr + uVar279;
    *pfVar1601 = auVar744._0_4_ + *pfVar1599;
    pfVar1601[1] = auVar744._4_4_ + fVar667;
    pfVar1601[2] = auVar744._8_4_ + fVar1604;
    pfVar1601[3] = auVar744._12_4_ + fVar730;
  }
  lVar280 = 0;
  for (uVar283 = uVar279 & 0xffffffff; (int)uVar283 < iVar277; uVar283 = (ulong)((int)uVar283 + 1))
  {
    *(float *)((long)outptr + uVar279 * 4 + lVar280) =
         fVar666 + *(float *)((long)ptr + uVar279 * 4 + lVar280);
    lVar280 = lVar280 + 4;
  }
  return;
}

Assistant:

static void binary_op_vector(const float* ptr, const float* ptr1, float* outptr, int aw, int bw, int ap, int bp, int op_type)
{
    using namespace BinaryOp_x86_fma_functor;

    if (op_type == BinaryOp::Operation_ADD) return binary_op_vector<binary_op_add>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_vector<binary_op_sub>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_vector<binary_op_mul>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_vector<binary_op_div>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_vector<binary_op_max>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_vector<binary_op_min>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_POW) return binary_op_vector<binary_op_pow>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_vector<binary_op_rsub>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_vector<binary_op_rdiv>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_vector<binary_op_rpow>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_vector<binary_op_atan2>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_vector<binary_op_ratan2>(ptr, ptr1, outptr, aw, bw, ap, bp);

    // should never reach here
}